

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O3

void ncnn::binary_op_vector
               (float *ptr,float *ptr1,float *outptr,int aw,int bw,int ap,int bp,int op_type)

{
  int iVar1;
  int iVar7;
  float *pfVar9;
  float *pfVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  byte bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  bool bVar40;
  bool bVar41;
  bool bVar42;
  bool bVar43;
  bool bVar44;
  undefined8 uVar45;
  ulong uVar46;
  ushort uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [32];
  undefined1 auVar292 [32];
  undefined1 auVar293 [32];
  undefined1 auVar294 [32];
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [64];
  undefined1 auVar325 [64];
  undefined1 auVar326 [64];
  undefined1 auVar327 [64];
  undefined1 auVar328 [64];
  undefined1 auVar329 [64];
  undefined1 auVar330 [64];
  undefined1 auVar331 [64];
  undefined1 auVar332 [64];
  undefined1 auVar333 [64];
  undefined1 auVar334 [64];
  undefined1 auVar335 [64];
  undefined1 auVar336 [64];
  undefined1 auVar337 [64];
  undefined1 auVar338 [64];
  undefined1 auVar339 [64];
  undefined1 auVar340 [64];
  undefined1 auVar341 [64];
  undefined1 auVar342 [64];
  undefined1 auVar343 [64];
  undefined1 auVar344 [64];
  undefined1 auVar345 [64];
  undefined1 auVar346 [64];
  undefined1 auVar347 [64];
  undefined1 auVar348 [64];
  undefined1 auVar349 [64];
  undefined1 auVar350 [64];
  undefined1 auVar351 [64];
  undefined1 auVar352 [64];
  undefined1 auVar353 [64];
  undefined1 auVar354 [64];
  undefined1 auVar355 [64];
  undefined1 auVar356 [64];
  undefined1 auVar357 [64];
  undefined1 auVar358 [64];
  undefined1 auVar359 [64];
  undefined1 auVar360 [64];
  undefined1 auVar361 [64];
  undefined1 auVar362 [64];
  undefined1 auVar363 [64];
  undefined1 auVar364 [64];
  undefined1 auVar365 [64];
  undefined1 auVar366 [64];
  undefined1 auVar367 [64];
  undefined1 auVar368 [64];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  float fVar397;
  float fVar398;
  float fVar399;
  float fVar400;
  float fVar401;
  float fVar402;
  float fVar403;
  float afVar404 [16];
  float afVar405 [16];
  float afVar406 [16];
  float afVar407 [16];
  float afVar408 [16];
  float afVar409 [16];
  float afVar410 [16];
  float afVar411 [16];
  float afVar412 [16];
  float afVar413 [16];
  float afVar414 [16];
  float afVar415 [16];
  float afVar416 [16];
  float afVar417 [16];
  float afVar418 [16];
  float afVar419 [16];
  float afVar420 [16];
  int size;
  int iVar421;
  uint uVar422;
  int iVar423;
  int size_1;
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar552 [32];
  undefined1 auVar553 [32];
  undefined1 auVar555 [32];
  undefined1 auVar556 [32];
  uint uVar424;
  long lVar425;
  ulong uVar426;
  ulong uVar427;
  ulong uVar428;
  undefined1 auVar671 [32];
  undefined1 auVar673 [32];
  undefined1 auVar674 [32];
  undefined1 auVar675 [32];
  undefined1 auVar676 [32];
  undefined1 auVar678 [32];
  undefined1 auVar679 [32];
  undefined1 auVar680 [32];
  undefined1 auVar681 [32];
  undefined1 auVar682 [32];
  undefined1 auVar683 [32];
  uint uVar873;
  uint uVar875;
  undefined1 auVar492 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [16];
  undefined1 auVar497 [16];
  undefined1 auVar499 [16];
  undefined1 auVar500 [16];
  undefined1 auVar501 [16];
  undefined1 auVar502 [16];
  undefined1 auVar503 [16];
  undefined1 auVar685 [32];
  undefined1 auVar686 [32];
  undefined1 auVar687 [32];
  undefined1 auVar505 [16];
  undefined1 auVar506 [16];
  undefined1 auVar507 [16];
  undefined1 auVar688 [32];
  undefined1 auVar689 [32];
  undefined1 auVar690 [32];
  undefined1 auVar508 [16];
  undefined1 auVar509 [16];
  undefined1 auVar510 [16];
  undefined1 auVar691 [32];
  undefined1 auVar692 [32];
  undefined1 auVar693 [32];
  undefined1 auVar694 [32];
  undefined1 auVar695 [32];
  undefined1 auVar511 [16];
  undefined1 auVar512 [16];
  undefined1 auVar513 [16];
  undefined1 auVar514 [16];
  undefined1 auVar515 [16];
  undefined1 auVar696 [32];
  undefined1 auVar697 [32];
  undefined1 auVar698 [32];
  undefined1 auVar699 [32];
  undefined1 auVar700 [32];
  undefined1 auVar516 [16];
  undefined1 auVar517 [16];
  undefined1 auVar518 [16];
  undefined1 auVar519 [16];
  undefined1 auVar520 [16];
  undefined1 auVar521 [16];
  undefined1 auVar522 [16];
  undefined1 auVar701 [32];
  undefined1 auVar702 [32];
  undefined1 auVar703 [32];
  undefined1 auVar523 [16];
  undefined1 auVar524 [16];
  undefined1 auVar525 [16];
  undefined1 auVar704 [32];
  undefined1 auVar705 [32];
  undefined1 auVar706 [32];
  undefined1 auVar526 [16];
  undefined1 auVar527 [16];
  undefined1 auVar528 [16];
  undefined1 auVar707 [32];
  undefined1 auVar708 [32];
  undefined1 auVar709 [32];
  undefined1 auVar710 [32];
  undefined1 auVar711 [32];
  undefined1 auVar529 [16];
  undefined1 auVar530 [16];
  undefined1 auVar531 [16];
  undefined1 auVar532 [16];
  undefined1 auVar533 [16];
  undefined1 auVar534 [16];
  undefined1 auVar535 [16];
  undefined1 auVar536 [16];
  undefined1 auVar537 [16];
  undefined1 auVar538 [16];
  undefined1 auVar539 [16];
  undefined1 auVar540 [16];
  undefined1 auVar541 [16];
  undefined1 auVar542 [16];
  undefined1 auVar543 [16];
  undefined1 auVar544 [16];
  undefined1 auVar545 [16];
  undefined1 auVar546 [16];
  undefined1 auVar547 [16];
  undefined1 auVar548 [16];
  undefined1 auVar549 [16];
  undefined1 auVar550 [16];
  undefined1 auVar551 [16];
  uint uVar872;
  uint uVar874;
  uint uVar876;
  uint uVar877;
  uint uVar878;
  undefined1 auVar712 [64];
  undefined1 auVar713 [64];
  undefined1 auVar714 [64];
  undefined1 auVar715 [64];
  undefined1 auVar716 [64];
  undefined1 auVar717 [64];
  undefined1 auVar718 [64];
  undefined1 auVar719 [64];
  undefined1 auVar720 [64];
  undefined1 auVar721 [64];
  undefined1 auVar722 [64];
  undefined1 auVar723 [64];
  undefined1 auVar724 [64];
  undefined1 auVar725 [64];
  undefined1 auVar726 [64];
  undefined1 auVar727 [64];
  undefined1 auVar728 [64];
  undefined1 auVar729 [64];
  undefined1 auVar730 [64];
  undefined1 auVar731 [64];
  undefined1 auVar732 [64];
  undefined1 auVar557 [32];
  undefined1 auVar558 [32];
  undefined1 auVar559 [32];
  undefined1 auVar560 [32];
  undefined1 auVar561 [32];
  undefined1 auVar733 [64];
  undefined1 auVar734 [64];
  undefined1 auVar735 [64];
  undefined1 auVar736 [64];
  undefined1 auVar562 [32];
  undefined1 auVar563 [32];
  undefined1 auVar564 [32];
  undefined1 auVar565 [32];
  undefined1 auVar566 [32];
  undefined1 auVar567 [32];
  undefined1 auVar568 [32];
  undefined1 auVar569 [32];
  undefined1 auVar570 [32];
  undefined1 auVar737 [64];
  undefined1 auVar738 [64];
  undefined1 auVar739 [64];
  undefined1 auVar740 [64];
  undefined1 auVar571 [32];
  undefined1 auVar572 [32];
  undefined1 auVar573 [32];
  undefined1 auVar741 [64];
  undefined1 auVar742 [64];
  undefined1 auVar743 [64];
  undefined1 auVar574 [32];
  undefined1 auVar575 [32];
  undefined1 auVar576 [32];
  undefined1 auVar577 [32];
  undefined1 auVar578 [32];
  undefined1 auVar579 [32];
  undefined1 auVar744 [64];
  undefined1 auVar745 [64];
  undefined1 auVar746 [64];
  undefined1 auVar747 [64];
  undefined1 auVar748 [64];
  undefined1 auVar749 [64];
  undefined1 auVar580 [32];
  undefined1 auVar581 [32];
  undefined1 auVar582 [32];
  undefined1 auVar583 [32];
  undefined1 auVar584 [32];
  undefined1 auVar585 [32];
  undefined1 auVar750 [64];
  undefined1 auVar751 [64];
  undefined1 auVar752 [64];
  undefined1 auVar753 [64];
  undefined1 auVar586 [32];
  undefined1 auVar587 [32];
  undefined1 auVar588 [32];
  undefined1 auVar589 [32];
  undefined1 auVar590 [32];
  undefined1 auVar591 [32];
  undefined1 auVar754 [64];
  undefined1 auVar755 [64];
  undefined1 auVar756 [64];
  undefined1 auVar592 [32];
  undefined1 auVar758 [64];
  undefined1 auVar759 [64];
  undefined1 auVar760 [64];
  undefined1 auVar761 [64];
  undefined1 auVar762 [64];
  undefined1 auVar763 [64];
  undefined1 auVar764 [64];
  undefined1 auVar765 [64];
  undefined1 auVar593 [32];
  undefined1 auVar594 [32];
  undefined1 auVar595 [32];
  undefined1 auVar766 [64];
  undefined1 auVar767 [64];
  undefined1 auVar768 [64];
  undefined1 auVar769 [64];
  undefined1 auVar596 [32];
  undefined1 auVar597 [32];
  undefined1 auVar598 [32];
  undefined1 auVar770 [64];
  undefined1 auVar771 [64];
  undefined1 auVar772 [64];
  undefined1 auVar773 [64];
  undefined1 auVar599 [32];
  undefined1 auVar600 [32];
  undefined1 auVar601 [32];
  undefined1 auVar774 [64];
  undefined1 auVar775 [64];
  undefined1 auVar776 [64];
  undefined1 auVar777 [64];
  undefined1 auVar778 [64];
  undefined1 auVar779 [64];
  undefined1 auVar780 [64];
  undefined1 auVar781 [64];
  undefined1 auVar602 [32];
  undefined1 auVar603 [32];
  undefined1 auVar604 [32];
  undefined1 auVar605 [32];
  undefined1 auVar782 [64];
  undefined1 auVar783 [64];
  undefined1 auVar784 [64];
  undefined1 auVar785 [64];
  undefined1 auVar606 [32];
  undefined1 auVar607 [32];
  undefined1 auVar608 [32];
  undefined1 auVar786 [64];
  undefined1 auVar787 [64];
  undefined1 auVar788 [64];
  undefined1 auVar789 [64];
  undefined1 auVar790 [64];
  undefined1 auVar791 [64];
  undefined1 auVar792 [64];
  undefined1 auVar793 [64];
  undefined1 auVar794 [64];
  undefined1 auVar795 [64];
  undefined1 auVar609 [32];
  undefined1 auVar610 [32];
  undefined1 auVar611 [32];
  undefined1 auVar612 [32];
  undefined1 auVar613 [32];
  undefined1 auVar614 [32];
  undefined1 auVar796 [64];
  undefined1 auVar797 [64];
  undefined1 auVar798 [64];
  undefined1 auVar615 [32];
  undefined1 auVar616 [32];
  undefined1 auVar617 [32];
  undefined1 auVar618 [32];
  undefined1 auVar619 [32];
  undefined1 auVar620 [32];
  undefined1 auVar799 [64];
  undefined1 auVar800 [64];
  undefined1 auVar801 [64];
  undefined1 auVar802 [64];
  undefined1 auVar803 [64];
  undefined1 auVar621 [32];
  undefined1 auVar622 [32];
  undefined1 auVar623 [32];
  undefined1 auVar624 [32];
  undefined1 auVar625 [32];
  undefined1 auVar626 [32];
  undefined1 auVar804 [64];
  undefined1 auVar805 [64];
  undefined1 auVar806 [64];
  undefined1 auVar807 [64];
  undefined1 auVar808 [64];
  undefined1 auVar809 [64];
  undefined1 auVar810 [64];
  undefined1 auVar627 [32];
  undefined1 auVar628 [32];
  undefined1 auVar629 [32];
  undefined1 auVar630 [32];
  undefined1 auVar631 [32];
  undefined1 auVar632 [32];
  undefined1 auVar811 [64];
  undefined1 auVar812 [64];
  undefined1 auVar813 [64];
  undefined1 auVar633 [32];
  undefined1 auVar634 [32];
  undefined1 auVar635 [32];
  undefined1 auVar636 [32];
  undefined1 auVar637 [32];
  undefined1 auVar638 [32];
  undefined1 auVar814 [64];
  undefined1 auVar815 [64];
  undefined1 auVar816 [64];
  undefined1 auVar817 [64];
  undefined1 auVar818 [64];
  undefined1 auVar819 [64];
  undefined1 auVar639 [32];
  undefined1 auVar640 [32];
  undefined1 auVar641 [32];
  undefined1 auVar820 [64];
  undefined1 auVar821 [64];
  undefined1 auVar822 [64];
  undefined1 auVar642 [32];
  undefined1 auVar643 [32];
  undefined1 auVar644 [32];
  undefined1 auVar823 [64];
  undefined1 auVar824 [64];
  undefined1 auVar825 [64];
  undefined1 auVar826 [64];
  undefined1 auVar827 [64];
  undefined1 auVar828 [64];
  undefined1 auVar829 [64];
  undefined1 auVar830 [64];
  undefined1 auVar645 [32];
  undefined1 auVar646 [32];
  undefined1 auVar647 [32];
  undefined1 auVar648 [32];
  undefined1 auVar831 [64];
  undefined1 auVar832 [64];
  undefined1 auVar833 [64];
  undefined1 auVar834 [64];
  undefined1 auVar649 [32];
  undefined1 auVar650 [32];
  undefined1 auVar651 [32];
  undefined1 auVar835 [64];
  undefined1 auVar836 [64];
  undefined1 auVar837 [64];
  undefined1 auVar838 [64];
  undefined1 auVar839 [64];
  undefined1 auVar652 [32];
  undefined1 auVar653 [32];
  undefined1 auVar654 [32];
  undefined1 auVar655 [32];
  undefined1 auVar656 [32];
  undefined1 auVar840 [64];
  undefined1 auVar841 [64];
  undefined1 auVar842 [64];
  undefined1 auVar843 [64];
  undefined1 auVar657 [32];
  undefined1 auVar658 [32];
  undefined1 auVar659 [32];
  undefined1 auVar660 [32];
  undefined1 auVar661 [32];
  undefined1 auVar662 [32];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar663 [32];
  undefined1 auVar664 [32];
  undefined1 auVar665 [32];
  undefined1 auVar666 [32];
  undefined1 auVar667 [32];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar668 [32];
  undefined1 auVar669 [32];
  undefined1 auVar670 [32];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar845 [64];
  undefined1 auVar846 [64];
  undefined1 auVar847 [64];
  undefined1 auVar504 [16];
  undefined1 auVar684 [32];
  uint uVar879;
  undefined1 auVar848 [64];
  undefined1 auVar849 [64];
  undefined1 auVar850 [64];
  undefined1 auVar851 [64];
  undefined1 auVar852 [64];
  undefined1 auVar853 [64];
  undefined1 auVar854 [64];
  undefined1 auVar855 [64];
  undefined1 auVar856 [64];
  undefined1 auVar857 [64];
  undefined1 auVar858 [64];
  undefined1 auVar859 [64];
  undefined1 auVar860 [64];
  undefined1 auVar861 [64];
  undefined1 auVar862 [64];
  undefined1 auVar863 [64];
  undefined1 auVar864 [64];
  undefined1 auVar865 [64];
  undefined1 auVar866 [64];
  undefined1 auVar867 [64];
  undefined1 auVar868 [64];
  undefined1 auVar869 [64];
  undefined1 auVar870 [64];
  undefined1 auVar871 [64];
  undefined4 uVar880;
  __m128 magic_zero;
  undefined1 auVar881 [16];
  undefined1 auVar882 [16];
  undefined1 auVar883 [16];
  undefined1 auVar884 [16];
  undefined1 auVar885 [16];
  undefined1 auVar886 [16];
  undefined1 auVar887 [16];
  undefined1 auVar888 [16];
  undefined1 auVar889 [16];
  undefined1 auVar890 [16];
  undefined1 auVar891 [16];
  undefined1 auVar892 [16];
  undefined1 auVar893 [16];
  undefined1 auVar894 [16];
  undefined1 auVar895 [32];
  undefined1 auVar896 [32];
  undefined1 auVar897 [32];
  undefined1 auVar898 [32];
  undefined1 auVar899 [32];
  undefined1 auVar900 [32];
  undefined1 auVar901 [32];
  undefined1 auVar902 [32];
  undefined1 auVar903 [32];
  undefined1 auVar904 [32];
  undefined1 auVar905 [32];
  undefined1 auVar906 [32];
  undefined1 auVar907 [32];
  undefined1 auVar908 [32];
  undefined1 auVar909 [32];
  undefined1 auVar910 [32];
  undefined1 auVar911 [32];
  undefined1 auVar912 [32];
  undefined1 auVar913 [32];
  undefined1 auVar914 [32];
  undefined1 auVar915 [32];
  undefined1 auVar916 [32];
  undefined1 auVar917 [32];
  undefined1 in_ZMM0 [64];
  float fVar918;
  __m128 magic_zero_1;
  undefined1 auVar919 [16];
  undefined1 auVar920 [16];
  undefined1 auVar921 [16];
  undefined1 auVar922 [16];
  undefined1 auVar925 [16];
  undefined1 auVar926 [16];
  undefined1 auVar927 [16];
  undefined1 auVar928 [16];
  undefined1 auVar929 [16];
  undefined1 auVar930 [16];
  undefined1 auVar931 [16];
  undefined1 auVar932 [16];
  undefined1 auVar933 [16];
  undefined1 auVar934 [16];
  undefined1 auVar935 [16];
  undefined1 auVar936 [16];
  undefined1 auVar939 [16];
  undefined1 auVar940 [16];
  undefined1 auVar941 [16];
  undefined1 auVar942 [16];
  undefined1 auVar943 [16];
  undefined1 auVar944 [16];
  undefined1 auVar945 [16];
  undefined1 auVar946 [16];
  undefined1 auVar947 [16];
  undefined1 auVar948 [16];
  undefined1 auVar949 [16];
  undefined1 auVar950 [16];
  undefined1 auVar952 [16];
  undefined1 auVar953 [16];
  undefined1 auVar955 [16];
  undefined1 auVar956 [16];
  undefined1 auVar957 [16];
  undefined1 auVar958 [32];
  undefined1 auVar959 [32];
  undefined1 auVar960 [32];
  undefined1 auVar961 [32];
  undefined1 auVar962 [32];
  undefined1 auVar963 [32];
  undefined1 auVar964 [32];
  undefined1 auVar965 [32];
  undefined1 auVar966 [32];
  undefined1 auVar967 [32];
  undefined1 auVar968 [32];
  undefined1 auVar969 [32];
  undefined1 auVar970 [32];
  undefined1 auVar971 [32];
  undefined1 auVar972 [32];
  undefined1 auVar973 [32];
  undefined1 auVar974 [32];
  undefined1 auVar975 [32];
  undefined1 auVar976 [32];
  undefined1 auVar977 [32];
  undefined1 auVar978 [32];
  undefined1 auVar979 [32];
  undefined1 auVar923 [16];
  undefined1 auVar980 [32];
  undefined1 auVar981 [32];
  undefined1 auVar982 [32];
  undefined1 auVar924 [16];
  undefined1 auVar983 [32];
  undefined1 auVar984 [32];
  undefined1 auVar985 [32];
  undefined1 auVar986 [32];
  undefined1 auVar987 [32];
  undefined1 auVar988 [32];
  undefined1 auVar989 [32];
  undefined1 auVar990 [32];
  undefined1 auVar991 [32];
  undefined1 auVar992 [32];
  undefined1 auVar993 [32];
  undefined1 auVar994 [32];
  undefined1 auVar995 [32];
  undefined1 auVar996 [32];
  undefined1 auVar937 [16];
  undefined1 auVar938 [16];
  undefined1 auVar1003 [32];
  undefined1 auVar1004 [32];
  undefined1 auVar1005 [32];
  undefined1 auVar1006 [32];
  undefined1 auVar1007 [32];
  undefined1 auVar951 [16];
  undefined1 auVar1008 [32];
  undefined1 auVar1009 [32];
  undefined1 auVar954 [16];
  undefined1 auVar1010 [32];
  undefined1 auVar997 [32];
  undefined1 auVar998 [32];
  undefined1 auVar999 [32];
  undefined1 auVar1000 [32];
  undefined1 auVar1001 [32];
  undefined1 auVar1002 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar1011 [64];
  __m128 magic_zero_9;
  undefined1 auVar1043 [32];
  undefined1 auVar1044 [32];
  undefined1 auVar1045 [32];
  undefined1 auVar1012 [16];
  undefined1 auVar1013 [16];
  undefined1 auVar1046 [32];
  undefined1 auVar1047 [32];
  undefined1 auVar1014 [16];
  undefined1 auVar1048 [32];
  undefined1 auVar1049 [32];
  undefined1 auVar1050 [32];
  undefined1 auVar1051 [32];
  undefined1 auVar1052 [32];
  undefined1 auVar1053 [32];
  undefined1 auVar1015 [16];
  undefined1 auVar1054 [32];
  undefined1 auVar1055 [32];
  undefined1 auVar1056 [32];
  undefined1 auVar1057 [32];
  undefined1 auVar1058 [32];
  undefined1 auVar1059 [32];
  undefined1 auVar1060 [32];
  undefined1 auVar1061 [32];
  undefined1 auVar1062 [32];
  undefined1 auVar1063 [32];
  undefined1 auVar1064 [32];
  undefined1 auVar1065 [32];
  undefined1 auVar1016 [16];
  undefined1 auVar1017 [16];
  undefined1 auVar1018 [16];
  undefined1 auVar1019 [16];
  undefined1 auVar1020 [16];
  undefined1 auVar1021 [16];
  undefined1 auVar1022 [16];
  undefined1 auVar1066 [32];
  undefined1 auVar1023 [16];
  undefined1 auVar1024 [16];
  undefined1 auVar1025 [16];
  undefined1 auVar1067 [32];
  undefined1 auVar1026 [16];
  undefined1 auVar1038 [28];
  undefined1 auVar1068 [32];
  undefined1 auVar1069 [32];
  undefined1 auVar1027 [16];
  undefined1 auVar1070 [32];
  undefined1 auVar1071 [32];
  undefined1 auVar1072 [32];
  undefined1 auVar1073 [32];
  undefined1 auVar1028 [16];
  undefined1 auVar1074 [32];
  undefined1 auVar1029 [16];
  undefined1 auVar1075 [32];
  undefined1 auVar1076 [32];
  undefined1 auVar1030 [16];
  undefined1 auVar1077 [32];
  undefined1 auVar1031 [16];
  undefined1 auVar1039 [28];
  undefined1 auVar1078 [32];
  undefined1 auVar1079 [32];
  undefined1 auVar1080 [32];
  undefined1 auVar1081 [32];
  undefined1 auVar1082 [32];
  undefined1 auVar1083 [32];
  undefined1 auVar1032 [16];
  undefined1 auVar1084 [32];
  undefined1 auVar1033 [16];
  undefined1 auVar1034 [16];
  undefined1 auVar1035 [16];
  undefined1 auVar1036 [16];
  undefined1 auVar1037 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar1085 [64];
  undefined1 auVar1086 [64];
  undefined1 auVar1040 [32];
  undefined1 auVar1041 [32];
  undefined1 auVar1042 [32];
  undefined1 auVar1087 [64];
  undefined1 auVar1088 [64];
  __m128 magic_zero_10;
  undefined1 auVar1090 [16];
  undefined1 auVar1091 [16];
  undefined1 auVar1094 [16];
  undefined1 auVar1117 [32];
  undefined1 auVar1118 [32];
  undefined1 auVar1119 [32];
  undefined1 auVar1120 [32];
  undefined1 auVar1121 [32];
  undefined1 auVar1092 [16];
  undefined1 auVar1093 [16];
  undefined1 auVar1122 [32];
  undefined1 auVar1123 [32];
  undefined1 auVar1124 [32];
  undefined1 auVar1125 [32];
  undefined1 auVar1126 [32];
  undefined1 auVar1127 [32];
  undefined1 auVar1128 [32];
  undefined1 auVar1095 [16];
  undefined1 auVar1096 [16];
  undefined1 auVar1097 [16];
  undefined1 auVar1098 [16];
  undefined1 auVar1099 [16];
  undefined1 auVar1100 [16];
  undefined1 auVar1101 [16];
  undefined1 auVar1102 [16];
  undefined1 auVar1104 [16];
  undefined1 auVar1105 [16];
  undefined1 auVar1106 [16];
  undefined1 auVar1107 [16];
  undefined1 auVar1108 [16];
  undefined1 auVar1109 [16];
  undefined1 auVar1136 [32];
  undefined1 auVar1110 [16];
  undefined1 auVar1137 [32];
  undefined1 auVar1111 [16];
  undefined1 auVar1112 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar1138 [64];
  undefined1 auVar1139 [64];
  undefined1 auVar1113 [32];
  undefined1 auVar1114 [32];
  undefined1 auVar1115 [32];
  undefined1 auVar1089 [16];
  undefined1 auVar1116 [32];
  undefined1 auVar1140 [64];
  undefined1 auVar1129 [32];
  undefined1 auVar1130 [32];
  undefined1 auVar1103 [16];
  undefined1 auVar1141 [64];
  undefined1 auVar1131 [32];
  undefined1 auVar1132 [32];
  undefined1 auVar1133 [32];
  undefined1 auVar1134 [32];
  undefined1 auVar1135 [32];
  undefined1 auVar1142 [64];
  __m128 magic_zero_2;
  v4sf one;
  undefined1 auVar1148 [16];
  undefined1 auVar1149 [16];
  undefined1 auVar1150 [16];
  undefined1 auVar1151 [16];
  undefined1 auVar1152 [16];
  undefined1 auVar1155 [16];
  undefined1 auVar1156 [16];
  undefined1 auVar1160 [16];
  undefined1 auVar1161 [16];
  undefined1 auVar1162 [16];
  undefined1 auVar1163 [16];
  undefined1 auVar1164 [16];
  undefined1 auVar1165 [16];
  undefined1 auVar1166 [16];
  undefined1 auVar1167 [16];
  undefined1 auVar1168 [16];
  undefined1 auVar1169 [16];
  undefined1 auVar1170 [16];
  undefined1 auVar1171 [32];
  undefined1 auVar1172 [32];
  undefined1 auVar1173 [32];
  undefined1 auVar1174 [32];
  undefined1 auVar1175 [32];
  undefined1 auVar1143 [16];
  undefined1 auVar1176 [32];
  undefined1 auVar1177 [32];
  undefined1 auVar1178 [32];
  undefined1 auVar1144 [16];
  undefined1 auVar1179 [32];
  undefined1 auVar1180 [32];
  undefined1 auVar1145 [16];
  undefined1 auVar1181 [32];
  undefined1 auVar1182 [32];
  undefined1 auVar1183 [32];
  undefined1 auVar1184 [32];
  undefined1 auVar1146 [16];
  undefined1 auVar1147 [16];
  undefined1 auVar1191 [32];
  undefined1 auVar1192 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar1193 [64];
  undefined1 auVar1185 [32];
  undefined1 auVar1186 [32];
  undefined1 auVar1187 [32];
  undefined1 auVar1188 [32];
  undefined1 auVar1153 [16];
  undefined1 auVar1154 [16];
  undefined1 auVar1194 [64];
  undefined1 auVar1157 [16];
  undefined1 auVar1158 [16];
  undefined1 auVar1189 [32];
  undefined1 auVar1190 [32];
  undefined1 auVar1159 [16];
  undefined1 auVar1195 [64];
  undefined1 auVar1196 [64];
  undefined1 auVar1226 [32];
  undefined1 auVar1227 [32];
  undefined1 auVar1228 [32];
  undefined1 auVar1229 [32];
  undefined1 auVar1230 [32];
  undefined1 auVar1197 [16];
  undefined1 auVar1231 [32];
  undefined1 auVar1232 [32];
  undefined1 auVar1233 [32];
  undefined1 auVar1234 [32];
  undefined1 auVar1198 [16];
  undefined1 auVar1235 [32];
  undefined1 auVar1236 [32];
  undefined1 auVar1245 [32];
  undefined1 auVar1246 [32];
  undefined1 auVar1247 [32];
  undefined1 auVar1248 [32];
  undefined1 auVar1206 [16];
  undefined1 auVar1207 [16];
  undefined1 auVar1208 [16];
  undefined1 auVar1209 [16];
  undefined1 auVar1215 [16];
  undefined1 auVar1216 [16];
  undefined1 auVar1217 [16];
  undefined1 auVar1218 [16];
  undefined1 auVar1219 [16];
  undefined1 auVar1220 [16];
  undefined1 auVar1221 [16];
  undefined1 auVar1222 [16];
  undefined1 auVar1223 [16];
  undefined1 auVar1255 [32];
  undefined1 auVar1256 [32];
  undefined1 auVar1224 [16];
  undefined1 auVar1225 [16];
  undefined1 in_ZMM5 [64];
  undefined1 auVar1237 [32];
  undefined1 auVar1199 [16];
  undefined1 auVar1238 [32];
  undefined1 auVar1239 [32];
  undefined1 auVar1240 [32];
  undefined1 auVar1200 [16];
  undefined1 auVar1241 [32];
  undefined1 auVar1242 [32];
  undefined1 auVar1243 [32];
  undefined1 auVar1244 [32];
  undefined1 auVar1257 [64];
  undefined1 auVar1249 [32];
  undefined1 auVar1250 [32];
  undefined1 auVar1251 [32];
  undefined1 auVar1201 [16];
  undefined1 auVar1252 [32];
  undefined1 auVar1202 [16];
  undefined1 auVar1203 [16];
  undefined1 auVar1204 [16];
  undefined1 auVar1205 [16];
  undefined1 auVar1258 [64];
  undefined1 auVar1253 [32];
  undefined1 auVar1254 [32];
  undefined1 auVar1210 [16];
  undefined1 auVar1259 [64];
  undefined1 auVar1211 [16];
  undefined1 auVar1212 [16];
  undefined1 auVar1213 [16];
  undefined1 auVar1214 [16];
  undefined1 auVar1260 [64];
  undefined1 auVar1305 [32];
  undefined1 auVar1306 [32];
  undefined1 auVar1307 [32];
  undefined1 auVar1308 [32];
  undefined1 auVar1309 [32];
  undefined1 auVar1310 [32];
  undefined1 auVar1265 [16];
  undefined1 auVar1311 [32];
  undefined1 auVar1266 [16];
  undefined1 auVar1267 [16];
  undefined1 auVar1268 [16];
  undefined1 auVar1269 [16];
  undefined1 auVar1312 [32];
  undefined1 auVar1270 [16];
  undefined1 auVar1271 [16];
  undefined1 auVar1313 [32];
  undefined1 auVar1272 [16];
  undefined1 auVar1314 [32];
  undefined1 auVar1273 [16];
  undefined1 auVar1274 [16];
  undefined1 auVar1315 [32];
  undefined1 auVar1275 [16];
  undefined1 auVar1276 [16];
  undefined1 auVar1316 [32];
  undefined1 auVar1317 [32];
  undefined1 auVar1277 [16];
  undefined1 auVar1318 [32];
  undefined1 auVar1319 [32];
  undefined1 auVar1278 [16];
  undefined1 auVar1279 [16];
  undefined1 auVar1320 [32];
  undefined1 auVar1280 [16];
  undefined1 auVar1281 [16];
  undefined1 auVar1321 [32];
  undefined1 auVar1282 [16];
  undefined1 auVar1322 [32];
  undefined1 auVar1283 [16];
  undefined1 auVar1284 [16];
  undefined1 auVar1285 [16];
  undefined1 auVar1286 [16];
  undefined1 auVar1287 [16];
  undefined1 in_ZMM6 [64];
  undefined1 auVar1288 [32];
  undefined1 auVar1289 [32];
  undefined1 auVar1290 [32];
  undefined1 auVar1291 [32];
  undefined1 auVar1292 [32];
  undefined1 auVar1261 [16];
  undefined1 auVar1293 [32];
  undefined1 auVar1294 [32];
  undefined1 auVar1295 [32];
  undefined1 auVar1296 [32];
  undefined1 auVar1262 [16];
  undefined1 auVar1297 [32];
  undefined1 auVar1298 [32];
  undefined1 auVar1263 [16];
  undefined1 auVar1299 [32];
  undefined1 auVar1300 [32];
  undefined1 auVar1301 [32];
  undefined1 auVar1264 [16];
  undefined1 auVar1302 [32];
  undefined1 auVar1303 [32];
  undefined1 auVar1304 [32];
  undefined1 auVar1323 [64];
  v4sf one_1;
  undefined1 auVar1328 [16];
  undefined1 auVar1329 [16];
  undefined1 auVar1330 [16];
  undefined1 auVar1331 [16];
  undefined1 auVar1332 [16];
  undefined1 auVar1333 [16];
  undefined1 auVar1334 [16];
  undefined1 auVar1335 [16];
  undefined1 auVar1336 [16];
  undefined1 auVar1337 [16];
  undefined1 auVar1338 [16];
  undefined1 auVar1339 [16];
  undefined1 auVar1340 [16];
  undefined1 auVar1341 [16];
  undefined1 auVar1342 [16];
  undefined1 auVar1343 [16];
  undefined1 auVar1344 [16];
  undefined1 auVar1345 [16];
  undefined1 auVar1346 [16];
  undefined1 auVar1347 [32];
  undefined1 auVar1348 [32];
  undefined1 auVar1349 [32];
  undefined1 auVar1350 [32];
  undefined1 auVar1351 [32];
  undefined1 auVar1324 [16];
  undefined1 auVar1352 [32];
  undefined1 auVar1353 [32];
  undefined1 auVar1354 [32];
  undefined1 auVar1325 [16];
  undefined1 auVar1355 [32];
  undefined1 auVar1356 [32];
  undefined1 auVar1326 [16];
  undefined1 auVar1357 [32];
  undefined1 auVar1358 [32];
  undefined1 auVar1359 [32];
  undefined1 auVar1327 [16];
  undefined1 auVar1360 [32];
  undefined1 auVar1361 [32];
  undefined1 auVar1362 [32];
  undefined1 auVar1363 [32];
  undefined1 auVar1364 [32];
  undefined1 auVar1365 [32];
  undefined1 auVar1366 [32];
  undefined1 auVar1367 [32];
  undefined1 auVar1368 [32];
  undefined1 auVar1369 [32];
  undefined1 auVar1370 [32];
  undefined1 auVar1371 [32];
  undefined1 auVar1372 [32];
  undefined1 auVar1373 [32];
  undefined1 auVar1374 [32];
  undefined1 auVar1375 [32];
  undefined1 auVar1376 [32];
  undefined1 auVar1377 [32];
  undefined1 auVar1378 [32];
  undefined1 in_ZMM7 [64];
  undefined1 auVar1379 [64];
  undefined1 auVar1380 [16];
  undefined1 auVar1381 [16];
  undefined1 auVar1382 [16];
  undefined1 auVar1383 [16];
  undefined1 auVar1384 [16];
  undefined1 auVar1385 [16];
  undefined1 auVar1386 [16];
  undefined1 auVar1387 [16];
  undefined1 auVar1388 [16];
  undefined1 auVar1389 [16];
  undefined1 auVar1390 [16];
  undefined1 auVar1391 [16];
  undefined1 auVar1392 [16];
  undefined1 auVar1393 [16];
  undefined1 auVar1394 [16];
  undefined1 auVar1395 [16];
  undefined1 auVar1396 [16];
  undefined1 auVar1397 [16];
  undefined1 auVar1398 [16];
  undefined1 auVar1399 [16];
  undefined1 auVar1400 [16];
  undefined1 auVar1401 [16];
  undefined1 auVar1402 [16];
  undefined1 auVar1403 [32];
  undefined1 auVar1404 [32];
  undefined1 auVar1405 [32];
  undefined1 auVar1406 [32];
  undefined1 auVar1407 [32];
  undefined1 auVar1408 [32];
  undefined1 auVar1409 [32];
  undefined1 auVar1410 [32];
  undefined1 auVar1411 [32];
  undefined1 auVar1412 [32];
  undefined1 auVar1413 [32];
  undefined1 auVar1414 [32];
  undefined1 auVar1415 [32];
  undefined1 auVar1416 [32];
  undefined1 auVar1417 [32];
  undefined1 auVar1418 [32];
  undefined1 auVar1419 [32];
  undefined1 auVar1420 [32];
  undefined1 auVar1421 [32];
  undefined1 auVar1422 [32];
  undefined1 auVar1423 [32];
  undefined1 auVar1424 [32];
  undefined1 auVar1425 [32];
  undefined1 auVar1426 [32];
  undefined1 auVar1427 [32];
  undefined1 auVar1428 [32];
  undefined1 auVar1429 [32];
  undefined1 auVar1430 [32];
  undefined1 auVar1431 [32];
  undefined1 auVar1432 [32];
  undefined1 auVar1433 [32];
  undefined1 auVar1434 [16];
  undefined1 auVar1435 [16];
  undefined1 auVar1436 [16];
  undefined1 auVar1437 [16];
  undefined1 auVar1438 [16];
  undefined1 auVar1439 [16];
  undefined1 auVar1440 [16];
  undefined1 auVar1441 [16];
  undefined1 auVar1442 [16];
  undefined1 auVar1443 [16];
  undefined1 auVar1444 [16];
  undefined1 auVar1445 [16];
  undefined1 auVar1446 [16];
  undefined1 auVar1447 [16];
  undefined1 auVar1448 [16];
  undefined1 auVar1449 [16];
  undefined1 auVar1450 [16];
  undefined1 auVar1451 [16];
  undefined1 auVar1452 [16];
  undefined1 auVar1453 [16];
  undefined1 auVar1454 [16];
  undefined1 auVar1455 [16];
  undefined1 auVar1456 [16];
  undefined1 auVar1457 [32];
  undefined1 auVar1458 [32];
  undefined1 auVar1459 [32];
  undefined1 auVar1460 [32];
  undefined1 auVar1461 [32];
  undefined1 auVar1462 [32];
  undefined1 auVar1463 [32];
  undefined1 auVar1464 [32];
  undefined1 auVar1465 [32];
  undefined1 auVar1466 [32];
  undefined1 auVar1467 [32];
  undefined1 auVar1468 [32];
  undefined1 auVar1469 [32];
  undefined1 auVar1470 [32];
  undefined1 auVar1471 [32];
  undefined1 auVar1472 [32];
  undefined1 auVar1473 [32];
  undefined1 auVar1474 [32];
  undefined1 auVar1475 [32];
  undefined1 auVar1476 [32];
  undefined1 auVar1477 [32];
  undefined1 auVar1478 [32];
  undefined1 auVar1479 [32];
  undefined1 auVar1480 [32];
  undefined1 auVar1481 [32];
  undefined1 auVar1482 [32];
  undefined1 auVar1483 [32];
  undefined1 auVar1484 [32];
  undefined1 auVar1485 [32];
  undefined1 auVar1486 [32];
  undefined1 auVar1487 [32];
  undefined1 auVar1488 [16];
  undefined1 auVar1489 [16];
  undefined1 auVar1490 [16];
  undefined1 auVar1491 [16];
  undefined1 auVar1492 [16];
  undefined1 auVar1493 [16];
  undefined1 auVar1494 [16];
  undefined1 auVar1495 [16];
  undefined1 auVar1496 [16];
  undefined1 auVar1497 [16];
  undefined1 auVar1498 [16];
  undefined1 auVar1499 [16];
  undefined1 auVar1500 [16];
  undefined1 auVar1501 [16];
  undefined1 auVar1502 [16];
  undefined1 auVar1503 [16];
  undefined1 auVar1504 [16];
  undefined1 auVar1505 [16];
  undefined1 auVar1506 [16];
  undefined1 auVar1507 [16];
  undefined1 auVar1508 [16];
  undefined1 auVar1509 [16];
  undefined1 auVar1510 [16];
  undefined1 auVar1511 [32];
  undefined1 auVar1512 [32];
  undefined1 auVar1513 [32];
  undefined1 auVar1514 [32];
  undefined1 auVar1515 [32];
  undefined1 auVar1516 [32];
  undefined1 auVar1517 [32];
  undefined1 auVar1518 [32];
  undefined1 auVar1519 [32];
  undefined1 auVar1520 [32];
  undefined1 auVar1521 [32];
  undefined1 auVar1522 [32];
  undefined1 auVar1523 [32];
  undefined1 auVar1524 [32];
  undefined1 auVar1525 [32];
  undefined1 auVar1526 [32];
  undefined1 auVar1527 [32];
  undefined1 auVar1528 [32];
  undefined1 auVar1529 [32];
  undefined1 auVar1530 [32];
  undefined1 auVar1531 [32];
  undefined1 auVar1532 [32];
  undefined1 auVar1533 [32];
  undefined1 auVar1534 [32];
  undefined1 auVar1535 [32];
  undefined1 auVar1536 [32];
  undefined1 auVar1537 [32];
  undefined1 auVar1538 [32];
  undefined1 auVar1539 [32];
  undefined1 auVar1540 [32];
  undefined1 auVar1541 [32];
  undefined1 auVar1542 [16];
  undefined1 auVar1543 [16];
  undefined1 auVar1544 [16];
  undefined1 auVar1545 [16];
  undefined1 auVar1546 [16];
  undefined1 auVar1547 [16];
  undefined1 auVar1548 [16];
  undefined1 auVar1549 [16];
  undefined1 auVar1550 [16];
  undefined1 auVar1551 [16];
  undefined1 auVar1552 [16];
  undefined1 auVar1553 [16];
  undefined1 auVar1554 [16];
  undefined1 auVar1555 [16];
  undefined1 auVar1556 [16];
  undefined1 auVar1557 [16];
  undefined1 auVar1558 [16];
  undefined1 auVar1559 [16];
  undefined1 auVar1560 [16];
  undefined1 auVar1561 [16];
  undefined1 auVar1562 [16];
  undefined1 auVar1563 [16];
  undefined1 auVar1564 [16];
  undefined1 auVar1565 [32];
  undefined1 auVar1566 [32];
  undefined1 auVar1567 [32];
  undefined1 auVar1568 [32];
  undefined1 auVar1569 [32];
  undefined1 auVar1570 [32];
  undefined1 auVar1571 [32];
  undefined1 auVar1572 [32];
  undefined1 auVar1573 [32];
  undefined1 auVar1574 [32];
  undefined1 auVar1575 [32];
  undefined1 auVar1576 [32];
  undefined1 auVar1577 [32];
  undefined1 auVar1578 [32];
  undefined1 auVar1579 [32];
  undefined1 auVar1580 [32];
  undefined1 auVar1581 [32];
  undefined1 auVar1582 [32];
  undefined1 auVar1583 [32];
  undefined1 auVar1584 [32];
  undefined1 auVar1585 [32];
  undefined1 auVar1586 [32];
  undefined1 auVar1587 [32];
  undefined1 auVar1588 [32];
  undefined1 auVar1589 [32];
  undefined1 auVar1590 [32];
  undefined1 auVar1591 [32];
  undefined1 auVar1592 [32];
  undefined1 auVar1593 [32];
  undefined1 auVar1594 [32];
  undefined1 auVar1595 [32];
  undefined1 auVar1596 [16];
  undefined1 auVar1597 [16];
  undefined1 auVar1598 [16];
  undefined1 auVar1599 [16];
  undefined1 auVar1600 [16];
  undefined1 auVar1601 [16];
  undefined1 auVar1602 [16];
  undefined1 auVar1603 [16];
  undefined1 auVar1604 [16];
  undefined1 auVar1605 [16];
  undefined1 auVar1606 [16];
  undefined1 auVar1607 [16];
  undefined1 auVar1608 [16];
  undefined1 auVar1609 [16];
  undefined1 auVar1610 [16];
  undefined1 auVar1611 [16];
  undefined1 auVar1612 [16];
  undefined1 auVar1613 [16];
  undefined1 auVar1614 [16];
  undefined1 auVar1615 [16];
  undefined1 auVar1616 [16];
  undefined1 auVar1617 [16];
  undefined1 auVar1618 [16];
  undefined1 auVar1619 [32];
  undefined1 auVar1620 [32];
  undefined1 auVar1621 [32];
  undefined1 auVar1622 [32];
  undefined1 auVar1623 [32];
  undefined1 auVar1624 [32];
  undefined1 auVar1625 [32];
  undefined1 auVar1626 [32];
  undefined1 auVar1627 [32];
  undefined1 auVar1628 [32];
  undefined1 auVar1629 [32];
  undefined1 auVar1630 [32];
  undefined1 auVar1631 [32];
  undefined1 auVar1632 [32];
  undefined1 auVar1633 [32];
  undefined1 auVar1634 [32];
  undefined1 auVar1635 [32];
  undefined1 auVar1636 [32];
  undefined1 auVar1637 [32];
  undefined1 auVar1638 [32];
  undefined1 auVar1639 [32];
  undefined1 auVar1640 [32];
  undefined1 auVar1641 [32];
  undefined1 auVar1642 [32];
  undefined1 auVar1643 [32];
  undefined1 auVar1644 [32];
  undefined1 auVar1645 [32];
  undefined1 auVar1646 [32];
  undefined1 auVar1647 [32];
  undefined1 auVar1648 [32];
  undefined1 auVar1649 [32];
  undefined1 auVar1650 [16];
  undefined1 auVar1651 [16];
  undefined1 auVar1652 [16];
  undefined1 auVar1653 [16];
  undefined1 auVar1654 [16];
  undefined1 auVar1655 [16];
  undefined1 auVar1656 [16];
  undefined1 auVar1657 [16];
  undefined1 auVar1658 [16];
  undefined1 auVar1659 [16];
  undefined1 auVar1660 [16];
  undefined1 auVar1661 [16];
  undefined1 auVar1662 [16];
  undefined1 auVar1663 [16];
  undefined1 auVar1664 [16];
  undefined1 auVar1665 [16];
  undefined1 auVar1666 [16];
  undefined1 auVar1667 [16];
  undefined1 auVar1668 [16];
  undefined1 auVar1669 [16];
  undefined1 auVar1670 [16];
  undefined1 auVar1671 [16];
  undefined1 auVar1672 [16];
  undefined1 auVar1673 [32];
  undefined1 auVar1674 [32];
  undefined1 auVar1675 [32];
  undefined1 auVar1676 [32];
  undefined1 auVar1677 [32];
  undefined1 auVar1678 [32];
  undefined1 auVar1679 [32];
  undefined1 auVar1680 [32];
  undefined1 auVar1681 [32];
  undefined1 auVar1682 [32];
  undefined1 auVar1683 [32];
  undefined1 auVar1684 [32];
  undefined1 auVar1685 [32];
  undefined1 auVar1686 [32];
  undefined1 auVar1687 [32];
  undefined1 auVar1688 [32];
  undefined1 auVar1689 [32];
  undefined1 auVar1690 [32];
  undefined1 auVar1691 [32];
  undefined1 auVar1692 [32];
  undefined1 auVar1693 [32];
  undefined1 auVar1694 [32];
  undefined1 auVar1695 [32];
  undefined1 auVar1696 [32];
  undefined1 auVar1697 [32];
  undefined1 auVar1698 [32];
  undefined1 auVar1699 [32];
  undefined1 auVar1700 [32];
  undefined1 auVar1701 [32];
  undefined1 auVar1702 [32];
  undefined1 auVar1703 [32];
  undefined1 auVar1705 [16];
  undefined1 auVar1706 [16];
  undefined1 auVar1707 [16];
  undefined1 auVar1708 [16];
  undefined1 auVar1709 [16];
  undefined1 auVar1710 [16];
  undefined1 auVar1711 [16];
  undefined1 auVar1712 [16];
  undefined1 auVar1713 [16];
  undefined1 auVar1714 [16];
  undefined1 auVar1715 [16];
  undefined1 auVar1716 [16];
  undefined1 auVar1717 [16];
  undefined1 auVar1718 [16];
  undefined1 auVar1719 [16];
  undefined1 auVar1720 [16];
  undefined1 auVar1721 [16];
  undefined1 auVar1726 [32];
  undefined1 auVar1733 [32];
  undefined1 auVar1734 [32];
  undefined1 auVar1735 [32];
  undefined1 auVar1736 [32];
  undefined1 auVar1737 [32];
  undefined1 auVar1738 [32];
  undefined1 auVar1739 [32];
  undefined1 auVar1740 [32];
  undefined1 auVar1741 [32];
  undefined1 auVar1742 [32];
  undefined1 auVar1743 [32];
  undefined1 auVar1744 [32];
  undefined1 auVar1745 [32];
  undefined1 auVar1746 [32];
  undefined1 auVar1747 [32];
  undefined1 auVar1748 [32];
  undefined1 auVar1749 [32];
  undefined1 auVar1750 [32];
  undefined1 auVar1751 [32];
  undefined1 auVar1752 [32];
  undefined1 auVar1753 [32];
  undefined1 auVar1754 [32];
  undefined1 auVar1722 [16];
  undefined1 auVar1723 [16];
  undefined1 auVar1724 [16];
  undefined1 auVar1725 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar1755 [64];
  undefined1 auVar1727 [32];
  undefined1 auVar1728 [32];
  undefined1 auVar1729 [32];
  undefined1 auVar1730 [32];
  undefined1 auVar1704 [16];
  undefined1 auVar1731 [32];
  undefined1 auVar1732 [32];
  undefined1 auVar1756 [64];
  undefined1 auVar1757 [16];
  undefined1 auVar1758 [16];
  undefined1 auVar1759 [16];
  undefined1 auVar1760 [16];
  undefined1 auVar1761 [16];
  undefined1 auVar1762 [16];
  undefined1 auVar1763 [16];
  undefined1 auVar1764 [16];
  undefined1 auVar1773 [16];
  undefined1 auVar1774 [16];
  undefined1 auVar1775 [16];
  undefined1 auVar1776 [16];
  undefined1 auVar1777 [32];
  undefined1 auVar1778 [32];
  undefined1 auVar1779 [32];
  undefined1 auVar1780 [32];
  undefined1 auVar1781 [32];
  undefined1 auVar1782 [32];
  undefined1 auVar1783 [32];
  undefined1 auVar1784 [32];
  undefined1 auVar1785 [32];
  undefined1 auVar1786 [32];
  undefined1 auVar1787 [32];
  undefined1 auVar1788 [32];
  undefined1 auVar1789 [32];
  undefined1 auVar1790 [32];
  undefined1 auVar1791 [32];
  undefined1 auVar1792 [32];
  undefined1 auVar1793 [32];
  undefined1 auVar1794 [32];
  undefined1 auVar1795 [32];
  undefined1 auVar1765 [16];
  undefined1 auVar1796 [32];
  undefined1 auVar1766 [16];
  undefined1 auVar1767 [16];
  undefined1 auVar1797 [32];
  undefined1 auVar1768 [16];
  undefined1 auVar1802 [32];
  float in_ZMM15 [16];
  undefined1 auVar1803 [64];
  undefined1 auVar1798 [32];
  undefined1 auVar1769 [16];
  undefined1 auVar1799 [32];
  undefined1 auVar1770 [16];
  undefined1 auVar1800 [32];
  undefined1 auVar1771 [16];
  undefined1 auVar1801 [32];
  undefined1 auVar1772 [16];
  undefined1 auVar1804 [64];
  undefined1 in_ZMM18 [64];
  undefined1 in_ZMM19 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 in_ZMM22 [64];
  undefined1 in_ZMM23 [64];
  undefined1 in_ZMM28 [64];
  undefined1 in_ZMM29 [64];
  undefined1 in_ZMM30 [64];
  undefined1 in_ZMM31 [64];
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [28];
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar8;
  undefined1 auVar554 [32];
  undefined1 auVar432 [16];
  undefined1 auVar493 [16];
  undefined1 auVar498 [16];
  undefined1 auVar757 [64];
  undefined1 auVar844 [64];
  undefined1 auVar672 [32];
  undefined1 auVar677 [32];
  
  afVar420 = _ps512_cephes_log_p8;
  afVar419 = _ps512_cephes_log_p7;
  afVar418 = _ps512_cephes_log_p6;
  afVar417 = _ps512_cephes_log_p5;
  afVar416 = _ps512_cephes_log_p4;
  afVar415 = _ps512_cephes_log_p3;
  afVar414 = _ps512_cephes_log_p2;
  afVar413 = _ps512_cephes_log_p1;
  afVar412 = ::_ps512_cephes_exp_p4;
  afVar411 = ::_ps512_cephes_exp_p3;
  afVar410 = ::_ps512_cephes_exp_p2;
  afVar409 = ::_ps512_cephes_exp_p1;
  afVar408 = ::_ps512_cephes_exp_p0;
  afVar407 = ::_ps512_cephes_LOG2EF;
  afVar406 = ::_ps512_exp_lo;
  afVar405 = ::_ps512_exp_hi;
  afVar404 = ::_ps512_1;
  auVar684 = in_ZMM2._0_32_;
  auVar497 = in_ZMM21._0_16_;
  auVar672 = in_ZMM1._0_32_;
  auVar496 = in_ZMM29._0_16_;
  auVar492 = in_ZMM20._0_16_;
  auVar504 = in_ZMM28._0_16_;
  auVar671 = in_ZMM0._0_32_;
  auVar462 = in_ZMM19._0_16_;
  auVar498 = in_ZMM31._0_16_;
  auVar675 = ::_ps512_1._0_32_;
  auVar493 = ::_ps512_exp_lo._0_16_;
  auVar516 = ::_ps512_exp_hi._0_16_;
  switch(op_type) {
  case 0:
    break;
  case 1:
    uVar422 = bw;
    if (bw < aw) {
      uVar422 = aw;
    }
    iVar421 = bp;
    if (bp < ap) {
      iVar421 = ap;
    }
    uVar424 = iVar421 * uVar422;
    if (ap != bp) {
LAB_003a252b:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        uVar424 = uVar422;
        if (0 < (int)uVar422 && iVar421 == 0x10) {
          do {
            auVar559._0_4_ = *ptr1;
            auVar366._4_4_ = auVar559._0_4_;
            auVar366._0_4_ = auVar559._0_4_;
            auVar366._8_4_ = auVar559._0_4_;
            auVar366._12_4_ = auVar559._0_4_;
            auVar366._16_4_ = auVar559._0_4_;
            auVar366._20_4_ = auVar559._0_4_;
            auVar366._24_4_ = auVar559._0_4_;
            auVar366._28_4_ = auVar559._0_4_;
            auVar366._32_4_ = auVar559._0_4_;
            auVar366._36_4_ = auVar559._0_4_;
            auVar366._40_4_ = auVar559._0_4_;
            auVar366._44_4_ = auVar559._0_4_;
            auVar366._48_4_ = auVar559._0_4_;
            auVar366._52_4_ = auVar559._0_4_;
            auVar366._56_4_ = auVar559._0_4_;
            auVar366._60_4_ = auVar559._0_4_;
            auVar730 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar366);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar424 = uVar424 - 1;
          } while (uVar424 != 0);
        }
        if (iVar421 == 8) {
          uVar424 = 0;
          if (1 < (int)uVar422) {
            iVar423 = 1;
            do {
              auVar559._0_4_ = *ptr1;
              auVar917._0_4_ = ptr1[1];
              auVar1045._4_4_ = auVar917._0_4_;
              auVar1045._0_4_ = auVar917._0_4_;
              auVar1045._8_4_ = auVar917._0_4_;
              auVar1045._12_4_ = auVar917._0_4_;
              auVar1045._16_4_ = auVar917._0_4_;
              auVar1045._20_4_ = auVar917._0_4_;
              auVar1045._24_4_ = auVar917._0_4_;
              auVar1045._28_4_ = auVar917._0_4_;
              auVar730 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                       CONCAT424(auVar559._0_4_,
                                                                 CONCAT420(auVar559._0_4_,
                                                                           CONCAT416(auVar559._0_4_,
                                                                                     CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar1045,1);
              auVar730 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar730);
              *(undefined1 (*) [64])outptr = auVar730;
              ptr = (float *)((long)ptr + 0x40);
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar423 = iVar423 + 2;
            } while (iVar423 < (int)uVar422);
            uVar424 = uVar422 & 0x7ffffffe;
          }
          iVar423 = uVar422 - uVar424;
          if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
            do {
              auVar559._0_4_ = *ptr1;
              auVar321._4_4_ = auVar559._0_4_;
              auVar321._0_4_ = auVar559._0_4_;
              auVar321._8_4_ = auVar559._0_4_;
              auVar321._12_4_ = auVar559._0_4_;
              auVar321._16_4_ = auVar559._0_4_;
              auVar321._20_4_ = auVar559._0_4_;
              auVar321._24_4_ = auVar559._0_4_;
              auVar321._28_4_ = auVar559._0_4_;
              auVar671 = vsubps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar321);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar423 = iVar423 + -1;
            } while (iVar423 != 0);
          }
        }
        if (iVar421 != 4) {
          return;
        }
        uVar424 = 0;
        if (3 < (int)uVar422) {
          iVar421 = 3;
          do {
            auVar559._0_4_ = ptr1[2];
            auVar975._4_4_ = auVar559._0_4_;
            auVar975._0_4_ = auVar559._0_4_;
            auVar975._8_4_ = auVar559._0_4_;
            auVar975._12_4_ = auVar559._0_4_;
            auVar559._0_4_ = ptr1[3];
            auVar975._20_4_ = auVar559._0_4_;
            auVar975._16_4_ = auVar559._0_4_;
            auVar975._24_4_ = auVar559._0_4_;
            auVar975._28_4_ = auVar559._0_4_;
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar730 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                                CONCAT48(auVar917._0_4_,
                                                                         CONCAT44(auVar917._0_4_,
                                                                                  auVar917._0_4_))),
                                                      CONCAT412(auVar559._0_4_,
                                                                CONCAT48(auVar559._0_4_,
                                                                         CONCAT44(auVar559._0_4_,
                                                                                  auVar559._0_4_))))
                                          ),auVar975,1);
            auVar730 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar730);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 4;
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 4;
          } while (iVar421 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffc;
        }
        uVar872 = uVar424 | 1;
        while ((int)uVar872 < (int)uVar422) {
          auVar559._0_4_ = *ptr1;
          auVar976._4_4_ = auVar559._0_4_;
          auVar976._0_4_ = auVar559._0_4_;
          auVar976._8_4_ = auVar559._0_4_;
          auVar976._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[1];
          auVar976._20_4_ = auVar559._0_4_;
          auVar976._16_4_ = auVar559._0_4_;
          auVar976._24_4_ = auVar559._0_4_;
          auVar976._28_4_ = auVar559._0_4_;
          auVar671 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar976);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar872 = uVar424 + 3;
          uVar424 = uVar424 + 2;
        }
        iVar421 = uVar422 - uVar424;
        if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar425 = 0;
        do {
          uVar880 = *(undefined4 *)((long)ptr1 + lVar425);
          auVar164._4_4_ = uVar880;
          auVar164._0_4_ = uVar880;
          auVar164._8_4_ = uVar880;
          auVar164._12_4_ = uVar880;
          auVar462 = vsubps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4)
                                     ,auVar164);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462;
          lVar425 = lVar425 + 4;
          iVar421 = iVar421 + -1;
        } while (iVar421 != 0);
        return;
      }
      if (bw == 1) {
        auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        if ((int)uVar424 < 0x10) {
          uVar422 = 0;
        }
        else {
          iVar421 = 0xf;
          do {
            auVar712 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar730);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 0x10;
          } while (iVar421 < (int)uVar424);
          uVar422 = uVar424 & 0x7ffffff0;
          auVar730 = ZEXT464((uint)*ptr1);
        }
        auVar915._0_4_ = auVar730._0_4_;
        if ((int)(uVar422 | 7) < (int)uVar424) {
          auVar915._4_4_ = auVar915._0_4_;
          auVar915._8_4_ = auVar915._0_4_;
          auVar915._12_4_ = auVar915._0_4_;
          auVar915._16_4_ = auVar915._0_4_;
          auVar915._20_4_ = auVar915._0_4_;
          auVar915._24_4_ = auVar915._0_4_;
          auVar915._28_4_ = auVar915._0_4_;
          uVar872 = uVar422;
          do {
            auVar671 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar915);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar422 = uVar872 + 8;
            iVar421 = uVar872 + 0xf;
            uVar872 = uVar422;
          } while (iVar421 < (int)uVar424);
          auVar915._0_4_ = *ptr1;
        }
        if ((int)uVar424 <= (int)(uVar422 | 3)) {
          return;
        }
        auVar889._4_4_ = auVar915._0_4_;
        auVar889._0_4_ = auVar915._0_4_;
        auVar889._8_4_ = auVar915._0_4_;
        auVar889._12_4_ = auVar915._0_4_;
        lVar425 = 0;
        do {
          auVar462 = vsubps_avx(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4),
                                auVar889);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462;
          lVar425 = lVar425 + 4;
        } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar421 == 0x10) {
        auVar730 = *(undefined1 (*) [64])ptr;
        uVar424 = uVar422;
        do {
          auVar559._0_4_ = *ptr1;
          auVar367._4_4_ = auVar559._0_4_;
          auVar367._0_4_ = auVar559._0_4_;
          auVar367._8_4_ = auVar559._0_4_;
          auVar367._12_4_ = auVar559._0_4_;
          auVar367._16_4_ = auVar559._0_4_;
          auVar367._20_4_ = auVar559._0_4_;
          auVar367._24_4_ = auVar559._0_4_;
          auVar367._28_4_ = auVar559._0_4_;
          auVar367._32_4_ = auVar559._0_4_;
          auVar367._36_4_ = auVar559._0_4_;
          auVar367._40_4_ = auVar559._0_4_;
          auVar367._44_4_ = auVar559._0_4_;
          auVar367._48_4_ = auVar559._0_4_;
          auVar367._52_4_ = auVar559._0_4_;
          auVar367._56_4_ = auVar559._0_4_;
          auVar367._60_4_ = auVar559._0_4_;
          auVar712 = vsubps_avx512f(auVar730,auVar367);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
        } while (uVar424 != 0);
      }
      if (iVar421 == 8) {
        auVar730 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        uVar424 = 0;
        if (1 < (int)uVar422) {
          iVar423 = 1;
          do {
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar1060._4_4_ = auVar917._0_4_;
            auVar1060._0_4_ = auVar917._0_4_;
            auVar1060._8_4_ = auVar917._0_4_;
            auVar1060._12_4_ = auVar917._0_4_;
            auVar1060._16_4_ = auVar917._0_4_;
            auVar1060._20_4_ = auVar917._0_4_;
            auVar1060._24_4_ = auVar917._0_4_;
            auVar1060._28_4_ = auVar917._0_4_;
            auVar712 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                     CONCAT424(auVar559._0_4_,
                                                               CONCAT420(auVar559._0_4_,
                                                                         CONCAT416(auVar559._0_4_,
                                                                                   CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar1060,1);
            auVar712 = vsubps_avx512f(auVar730,auVar712);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          do {
            auVar559._0_4_ = *ptr1;
            auVar322._4_4_ = auVar559._0_4_;
            auVar322._0_4_ = auVar559._0_4_;
            auVar322._8_4_ = auVar559._0_4_;
            auVar322._12_4_ = auVar559._0_4_;
            auVar322._16_4_ = auVar559._0_4_;
            auVar322._20_4_ = auVar559._0_4_;
            auVar322._24_4_ = auVar559._0_4_;
            auVar322._28_4_ = auVar559._0_4_;
            auVar671 = vsubps_avx512vl(auVar730._0_32_,auVar322);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      if (iVar421 != 4) {
        return;
      }
      auVar730 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      uVar424 = 0;
      if (3 < (int)uVar422) {
        iVar421 = 3;
        do {
          auVar559._0_4_ = ptr1[2];
          auVar994._4_4_ = auVar559._0_4_;
          auVar994._0_4_ = auVar559._0_4_;
          auVar994._8_4_ = auVar559._0_4_;
          auVar994._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[3];
          auVar994._20_4_ = auVar559._0_4_;
          auVar994._16_4_ = auVar559._0_4_;
          auVar994._24_4_ = auVar559._0_4_;
          auVar994._28_4_ = auVar559._0_4_;
          auVar559._0_4_ = *ptr1;
          auVar917._0_4_ = ptr1[1];
          auVar712 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                              CONCAT48(auVar917._0_4_,
                                                                       CONCAT44(auVar917._0_4_,
                                                                                auVar917._0_4_))),
                                                    CONCAT412(auVar559._0_4_,
                                                              CONCAT48(auVar559._0_4_,
                                                                       CONCAT44(auVar559._0_4_,
                                                                                auVar559._0_4_))))),
                                auVar994,1);
          auVar712 = vsubps_avx512f(auVar730,auVar712);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      auVar462 = auVar730._0_16_;
      if ((int)(uVar424 | 1) < (int)uVar422) {
        auVar995._16_16_ = auVar462;
        auVar995._0_16_ = auVar462;
        uVar872 = uVar424;
        do {
          auVar559._0_4_ = *ptr1;
          auVar1061._4_4_ = auVar559._0_4_;
          auVar1061._0_4_ = auVar559._0_4_;
          auVar1061._8_4_ = auVar559._0_4_;
          auVar1061._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[1];
          auVar1061._20_4_ = auVar559._0_4_;
          auVar1061._16_4_ = auVar559._0_4_;
          auVar1061._24_4_ = auVar559._0_4_;
          auVar1061._28_4_ = auVar559._0_4_;
          auVar671 = vsubps_avx(auVar995,auVar1061);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar424 = uVar872 + 2;
          iVar421 = uVar872 + 3;
          uVar872 = uVar424;
        } while (iVar421 < (int)uVar422);
      }
      if ((int)uVar422 <= (int)uVar424) {
        return;
      }
      lVar425 = 0;
      do {
        auVar559._0_4_ = ptr1[lVar425];
        auVar165._4_4_ = auVar559._0_4_;
        auVar165._0_4_ = auVar559._0_4_;
        auVar165._8_4_ = auVar559._0_4_;
        auVar165._12_4_ = auVar559._0_4_;
        auVar492 = vsubps_avx512vl(auVar462,auVar165);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar492;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        lVar425 = lVar425 + 1;
      } while (uVar422 - uVar424 != (int)lVar425);
      return;
    }
    if (aw == bw) {
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar730 = vsubps_avx512f(*(undefined1 (*) [64])ptr,*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [64])outptr = auVar730;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar671 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                              *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar462 = vsubps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,
                              *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
             *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4) -
             *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4);
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003a252b;
      auVar559._0_4_ = *ptr;
      if (iVar421 == 4) {
        auVar945 = *(undefined1 (*) [16])ptr;
        auVar730 = ZEXT3264(CONCAT1616(auVar945,auVar945));
      }
      else {
        auVar945._4_4_ = auVar559._0_4_;
        auVar945._0_4_ = auVar559._0_4_;
        auVar945._8_4_ = auVar559._0_4_;
        auVar945._12_4_ = auVar559._0_4_;
        if (iVar421 == 8) {
          auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar1081._4_4_ = auVar559._0_4_;
          auVar1081._0_4_ = auVar559._0_4_;
          auVar1081._8_4_ = auVar559._0_4_;
          auVar1081._12_4_ = auVar559._0_4_;
          auVar1081._16_4_ = auVar559._0_4_;
          auVar1081._20_4_ = auVar559._0_4_;
          auVar1081._24_4_ = auVar559._0_4_;
          auVar1081._28_4_ = auVar559._0_4_;
          auVar730 = ZEXT3264(auVar1081);
          if (iVar421 == 0x10) {
            auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_003ac9e4;
          }
        }
      }
      auVar1081 = auVar730._0_32_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar1081,1);
LAB_003ac9e4:
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar712 = vsubps_avx512f(auVar730,*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar671 = vsubps_avx(auVar1081,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar462 = vsubps_avx(auVar945,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
             auVar559._0_4_ - *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4);
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    auVar559._0_4_ = *ptr1;
    if (iVar421 == 4) {
      auVar930 = *(undefined1 (*) [16])ptr1;
      auVar730 = ZEXT3264(CONCAT1616(auVar930,auVar930));
    }
    else {
      auVar930._4_4_ = auVar559._0_4_;
      auVar930._0_4_ = auVar559._0_4_;
      auVar930._8_4_ = auVar559._0_4_;
      auVar930._12_4_ = auVar559._0_4_;
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar1072._4_4_ = auVar559._0_4_;
        auVar1072._0_4_ = auVar559._0_4_;
        auVar1072._8_4_ = auVar559._0_4_;
        auVar1072._12_4_ = auVar559._0_4_;
        auVar1072._16_4_ = auVar559._0_4_;
        auVar1072._20_4_ = auVar559._0_4_;
        auVar1072._24_4_ = auVar559._0_4_;
        auVar1072._28_4_ = auVar559._0_4_;
        auVar730 = ZEXT3264(auVar1072);
        if (iVar421 == 0x10) {
          auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_003aa998;
        }
      }
    }
    auVar1072 = auVar730._0_32_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar1072,1);
LAB_003aa998:
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      iVar421 = 0xf;
      do {
        auVar712 = vsubps_avx512f(*(undefined1 (*) [64])ptr,auVar730);
        *(undefined1 (*) [64])outptr = auVar712;
        ptr = (float *)((long)ptr + 0x40);
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
    }
    uVar872 = uVar422 | 7;
    while ((int)uVar872 < (int)uVar424) {
      auVar671 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar1072);
      *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      uVar872 = uVar422 + 0xf;
      uVar422 = uVar422 + 8;
    }
    uVar872 = uVar422 | 3;
    while ((int)uVar872 < (int)uVar424) {
      auVar462 = vsubps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar930);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      uVar872 = uVar422 + 7;
      uVar422 = uVar422 + 4;
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      ::_ps512_1[0] = ::_ps512_1[0];
      ::_ps512_1[1] = ::_ps512_1[1];
      ::_ps512_1[2] = ::_ps512_1[2];
      ::_ps512_1[3] = ::_ps512_1[3];
      ::_ps512_1[4] = ::_ps512_1[4];
      ::_ps512_1[5] = ::_ps512_1[5];
      ::_ps512_1[6] = ::_ps512_1[6];
      ::_ps512_1[7] = ::_ps512_1[7];
      ::_ps512_1[8] = ::_ps512_1[8];
      ::_ps512_1[9] = ::_ps512_1[9];
      ::_ps512_1[10] = ::_ps512_1[10];
      ::_ps512_1[0xb] = ::_ps512_1[0xb];
      ::_ps512_1[0xc] = ::_ps512_1[0xc];
      ::_ps512_1[0xd] = ::_ps512_1[0xd];
      ::_ps512_1[0xe] = ::_ps512_1[0xe];
      ::_ps512_1[0xf] = ::_ps512_1[0xf];
      ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
      ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
      ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
      ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
      ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
      ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
      ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
      ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
      ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
      ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
      ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
      ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
      ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
      ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
      ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
      ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
      ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
      ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
      ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
      ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
      ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
      ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
      ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
      ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
      ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
      ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
      ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
      ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
      ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
      ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
      ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
      ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
      ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
      ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
      ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
      ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
      ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
      ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
      ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
      ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
      ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
      ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
      ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
      ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
      ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
      ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
      ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
      ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
      ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
      ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
      ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
      ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
      ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
      ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
      ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
      ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
      ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
      ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
      ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
      ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
      ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
      ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
      ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
      ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
      ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
      ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
      ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
      ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
      ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
      ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
      ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
      ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
      ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
      ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
      ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
      ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
      ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
      ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
      ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
      ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
      ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
      ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
      ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
      ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
      ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
      ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
      ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
      ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
      ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
      ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
      ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
      ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
      ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
      ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
      ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
      ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
      ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
      ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
      ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
      ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
      ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
      ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
      ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
      ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
      ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
      ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
      ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
      ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
      ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
      ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
      ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
      ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
      ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
      ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
      ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
      ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
      ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
      ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
      ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
      ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
      ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
      ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
      ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
      ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
      ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
      ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
      ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
      ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
      ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
      ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
      ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
      ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
      ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
      ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
      ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
      ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
      ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
      ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
      ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
      ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
      ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
      ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
      ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
      ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
      ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
      ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
      ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
      ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
      ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
      ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
      ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
      ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
      ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
      ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
      ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
      ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
      ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
      ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
      ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
      ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
      _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
      _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
      _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
      _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
      _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
      _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
      _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
      _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
      _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
      _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
      _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
      _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
      _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
      _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
      _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
      _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
      _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
      _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
      _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
      _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
      _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
      _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
      _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
      _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
      _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
      _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
      _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
      _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
      _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
      _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
      _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
      _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
      _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
      _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
      _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
      _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
      _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
      _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
      _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
      _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
      _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
      _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
      _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
      _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
      _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
      _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
      _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
      _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
      _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
      _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
      _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
      _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
      _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
      _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
      _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
      _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
      _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
      _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
      _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
      _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
      _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
      _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
      _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
      _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
      _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
      _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
      _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
      _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
      _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
      _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
      _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
      _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
      _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
      _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
      _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
      _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
      _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
      _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
      _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
      _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
      _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
      _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
      _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
      _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
      _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
      _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
      _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
      _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
      _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
      _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
      _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
      _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
      _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
      _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
      _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
      _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
      _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
      _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
      _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
      _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
      _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
      _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
      _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
      _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
      _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
      _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
      _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
      _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
      _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
      _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
      _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
      _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
      _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
      _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
      _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
      _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
      _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
      _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
      _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
      _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
      _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
      _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
      _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
      _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
      _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
      _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
      _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
      _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
      _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
      _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
      _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
      _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
      _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
      _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
      _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
      _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
      _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
      _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
      _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
      _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
      _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
      _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
      _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
      _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
      _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
      _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
      _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
      _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
      _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
      _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
      _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
      _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
      _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
      _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
      _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
      _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
      _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
      _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
      _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
      _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
      _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
      _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
      _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
      _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
      _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
      _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
      _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
      _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
      _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
      _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
      _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
      _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
      _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
      _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
      _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
      _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
      _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
      _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
      _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
      _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
      _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
      _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
      _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
      _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
      _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
      _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
      _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
      _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
      _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
      _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
      _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
      _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
      _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
      _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
      _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
      _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
      _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
      _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
      _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
      _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
      _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
      _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
      _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
      _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
      _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
      _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
      _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
      _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
      _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
      _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
      _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
      _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
      _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
      _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
      _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
      _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
      _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
      _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
      _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
      _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
      _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
      _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
      _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
      _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
      return;
    }
    lVar425 = 0;
    do {
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
           *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4) - auVar559._0_4_;
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  case 2:
    uVar422 = bw;
    if (bw < aw) {
      uVar422 = aw;
    }
    iVar421 = bp;
    if (bp < ap) {
      iVar421 = ap;
    }
    uVar424 = iVar421 * uVar422;
    if (ap != bp) {
LAB_003a1c09:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        uVar424 = uVar422;
        if (0 < (int)uVar422 && iVar421 == 0x10) {
          do {
            auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar730 = vmulps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar424 = uVar424 - 1;
          } while (uVar424 != 0);
        }
        if (iVar421 == 8) {
          uVar424 = 0;
          if (1 < (int)uVar422) {
            iVar423 = 1;
            do {
              auVar559._0_4_ = *ptr1;
              auVar917._0_4_ = ptr1[1];
              auVar970._4_4_ = auVar917._0_4_;
              auVar970._0_4_ = auVar917._0_4_;
              auVar970._8_4_ = auVar917._0_4_;
              auVar970._12_4_ = auVar917._0_4_;
              auVar970._16_4_ = auVar917._0_4_;
              auVar970._20_4_ = auVar917._0_4_;
              auVar970._24_4_ = auVar917._0_4_;
              auVar970._28_4_ = auVar917._0_4_;
              auVar730 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                       CONCAT424(auVar559._0_4_,
                                                                 CONCAT420(auVar559._0_4_,
                                                                           CONCAT416(auVar559._0_4_,
                                                                                     CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar970,1);
              auVar730 = vmulps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
              *(undefined1 (*) [64])outptr = auVar730;
              ptr = (float *)((long)ptr + 0x40);
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar423 = iVar423 + 2;
            } while (iVar423 < (int)uVar422);
            uVar424 = uVar422 & 0x7ffffffe;
          }
          iVar423 = uVar422 - uVar424;
          if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
            do {
              auVar559._0_4_ = *ptr1;
              auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
              auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
              auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
              auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
              auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
              fVar918 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
              *(float *)*(undefined1 (*) [64])outptr =
                   auVar559._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
              *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ * auVar917._0_4_;
              *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar559._0_4_ * auVar914._0_4_;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar559._0_4_ * auVar916._0_4_
              ;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) =
                   auVar559._0_4_ * auVar913._0_4_;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) =
                   auVar559._0_4_ * auVar915._0_4_;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar559._0_4_ * fVar918;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar559._0_4_;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar423 = iVar423 + -1;
            } while (iVar423 != 0);
          }
        }
        if (iVar421 != 4) {
          return;
        }
        uVar424 = 0;
        if (3 < (int)uVar422) {
          iVar421 = 3;
          do {
            auVar559._0_4_ = ptr1[2];
            auVar898._4_4_ = auVar559._0_4_;
            auVar898._0_4_ = auVar559._0_4_;
            auVar898._8_4_ = auVar559._0_4_;
            auVar898._12_4_ = auVar559._0_4_;
            auVar559._0_4_ = ptr1[3];
            auVar898._20_4_ = auVar559._0_4_;
            auVar898._16_4_ = auVar559._0_4_;
            auVar898._24_4_ = auVar559._0_4_;
            auVar898._28_4_ = auVar559._0_4_;
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar730 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                                CONCAT48(auVar917._0_4_,
                                                                         CONCAT44(auVar917._0_4_,
                                                                                  auVar917._0_4_))),
                                                      CONCAT412(auVar559._0_4_,
                                                                CONCAT48(auVar559._0_4_,
                                                                         CONCAT44(auVar559._0_4_,
                                                                                  auVar559._0_4_))))
                                          ),auVar898,1);
            auVar730 = vmulps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 4;
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 4;
          } while (iVar421 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffc;
        }
        uVar872 = uVar424 | 1;
        while ((int)uVar872 < (int)uVar422) {
          auVar559._0_4_ = *ptr1;
          auVar917._0_4_ = ptr1[1];
          auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          fVar918 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          *(float *)*(undefined1 (*) [64])outptr =
               auVar559._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ * auVar914._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar559._0_4_ * auVar916._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar559._0_4_ * auVar913._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar917._0_4_ * auVar915._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar917._0_4_ * fVar918;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar917._0_4_ * fVar397;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar917._0_4_;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar872 = uVar424 + 3;
          uVar424 = uVar424 + 2;
        }
        iVar421 = uVar422 - uVar424;
        if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar425 = 0;
        do {
          auVar559._0_4_ = *(float *)((long)ptr1 + lVar425);
          pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
          auVar917._0_4_ = pfVar9[1];
          auVar914._0_4_ = pfVar9[2];
          auVar916._0_4_ = pfVar9[3];
          pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4);
          *pfVar10 = auVar559._0_4_ * *pfVar9;
          pfVar10[1] = auVar559._0_4_ * auVar917._0_4_;
          pfVar10[2] = auVar559._0_4_ * auVar914._0_4_;
          pfVar10[3] = auVar559._0_4_ * auVar916._0_4_;
          lVar425 = lVar425 + 4;
          iVar421 = iVar421 + -1;
        } while (iVar421 != 0);
        return;
      }
      if (bw == 1) {
        auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        if ((int)uVar424 < 0x10) {
          uVar422 = 0;
        }
        else {
          iVar421 = 0xf;
          do {
            in_ZMM1 = vmulps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = in_ZMM1;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 0x10;
          } while (iVar421 < (int)uVar424);
          uVar422 = uVar424 & 0x7ffffff0;
          auVar730 = ZEXT464((uint)*ptr1);
        }
        auVar559._0_4_ = auVar730._0_4_;
        uVar872 = uVar422;
        if ((int)(uVar422 | 7) < (int)uVar424) {
          do {
            auVar1011._0_4_ = auVar559._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
            auVar1011._4_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar1011._8_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar1011._12_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar1011._16_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            auVar1011._20_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            auVar1011._28_36_ = in_ZMM1._28_36_;
            auVar1011._24_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            in_ZMM1 = ZEXT3264(auVar1011._0_32_);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar1011._0_32_;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar422 = uVar872 + 8;
            iVar421 = uVar872 + 0xf;
            uVar872 = uVar422;
          } while (iVar421 < (int)uVar424);
          auVar559._0_4_ = *ptr1;
        }
        if ((int)uVar424 <= (int)(uVar422 | 3)) {
          return;
        }
        lVar425 = 0;
        do {
          pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
          auVar917._0_4_ = pfVar9[1];
          auVar914._0_4_ = pfVar9[2];
          auVar916._0_4_ = pfVar9[3];
          pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4);
          *pfVar10 = auVar559._0_4_ * *pfVar9;
          pfVar10[1] = auVar559._0_4_ * auVar917._0_4_;
          pfVar10[2] = auVar559._0_4_ * auVar914._0_4_;
          pfVar10[3] = auVar559._0_4_ * auVar916._0_4_;
          lVar425 = lVar425 + 4;
        } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar421 == 0x10) {
        auVar730 = *(undefined1 (*) [64])ptr;
        uVar424 = uVar422;
        do {
          auVar559._0_4_ = *ptr1;
          auVar365._4_4_ = auVar559._0_4_;
          auVar365._0_4_ = auVar559._0_4_;
          auVar365._8_4_ = auVar559._0_4_;
          auVar365._12_4_ = auVar559._0_4_;
          auVar365._16_4_ = auVar559._0_4_;
          auVar365._20_4_ = auVar559._0_4_;
          auVar365._24_4_ = auVar559._0_4_;
          auVar365._28_4_ = auVar559._0_4_;
          auVar365._32_4_ = auVar559._0_4_;
          auVar365._36_4_ = auVar559._0_4_;
          auVar365._40_4_ = auVar559._0_4_;
          auVar365._44_4_ = auVar559._0_4_;
          auVar365._48_4_ = auVar559._0_4_;
          auVar365._52_4_ = auVar559._0_4_;
          auVar365._56_4_ = auVar559._0_4_;
          auVar365._60_4_ = auVar559._0_4_;
          auVar712 = vmulps_avx512f(auVar730,auVar365);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
        } while (uVar424 != 0);
      }
      if (iVar421 == 8) {
        auVar730 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        uVar424 = 0;
        if (1 < (int)uVar422) {
          iVar423 = 1;
          do {
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar1054._4_4_ = auVar917._0_4_;
            auVar1054._0_4_ = auVar917._0_4_;
            auVar1054._8_4_ = auVar917._0_4_;
            auVar1054._12_4_ = auVar917._0_4_;
            auVar1054._16_4_ = auVar917._0_4_;
            auVar1054._20_4_ = auVar917._0_4_;
            auVar1054._24_4_ = auVar917._0_4_;
            auVar1054._28_4_ = auVar917._0_4_;
            auVar712 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                     CONCAT424(auVar559._0_4_,
                                                               CONCAT420(auVar559._0_4_,
                                                                         CONCAT416(auVar559._0_4_,
                                                                                   CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar1054,1);
            auVar712 = vmulps_avx512f(auVar712,auVar730);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          do {
            auVar559._0_4_ = *ptr1;
            auVar320._4_4_ = auVar559._0_4_;
            auVar320._0_4_ = auVar559._0_4_;
            auVar320._8_4_ = auVar559._0_4_;
            auVar320._12_4_ = auVar559._0_4_;
            auVar320._16_4_ = auVar559._0_4_;
            auVar320._20_4_ = auVar559._0_4_;
            auVar320._24_4_ = auVar559._0_4_;
            auVar320._28_4_ = auVar559._0_4_;
            auVar671 = vmulps_avx512vl(auVar730._0_32_,auVar320);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      if (iVar421 != 4) {
        return;
      }
      auVar730 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      uVar424 = 0;
      if (3 < (int)uVar422) {
        iVar421 = 3;
        do {
          auVar559._0_4_ = ptr1[2];
          auVar987._4_4_ = auVar559._0_4_;
          auVar987._0_4_ = auVar559._0_4_;
          auVar987._8_4_ = auVar559._0_4_;
          auVar987._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[3];
          auVar987._20_4_ = auVar559._0_4_;
          auVar987._16_4_ = auVar559._0_4_;
          auVar987._24_4_ = auVar559._0_4_;
          auVar987._28_4_ = auVar559._0_4_;
          auVar559._0_4_ = *ptr1;
          auVar917._0_4_ = ptr1[1];
          auVar712 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                              CONCAT48(auVar917._0_4_,
                                                                       CONCAT44(auVar917._0_4_,
                                                                                auVar917._0_4_))),
                                                    CONCAT412(auVar559._0_4_,
                                                              CONCAT48(auVar559._0_4_,
                                                                       CONCAT44(auVar559._0_4_,
                                                                                auVar559._0_4_))))),
                                auVar987,1);
          auVar712 = vmulps_avx512f(auVar712,auVar730);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      uVar872 = uVar424 | 1;
      while ((int)uVar872 < (int)uVar422) {
        auVar559._0_4_ = *ptr1;
        auVar917._0_4_ = ptr1[1];
        *(float *)*(undefined1 (*) [64])outptr = auVar559._0_4_ * auVar730._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ * auVar730._4_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar559._0_4_ * auVar730._8_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar559._0_4_ * auVar730._12_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar917._0_4_ * auVar730._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar917._0_4_ * auVar730._4_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar917._0_4_ * auVar730._8_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar917._0_4_;
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar424 + 3;
        uVar424 = uVar424 + 2;
      }
      if ((int)uVar422 <= (int)uVar424) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        auVar559._0_4_ = ptr1[lVar425];
        auVar163._4_4_ = auVar559._0_4_;
        auVar163._0_4_ = auVar559._0_4_;
        auVar163._8_4_ = auVar559._0_4_;
        auVar163._12_4_ = auVar559._0_4_;
        auVar462 = vmulps_avx512vl(auVar730._0_16_,auVar163);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        lVar425 = lVar425 + 1;
      } while (uVar422 - uVar424 != (int)lVar425);
      return;
    }
    if (aw == bw) {
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar730 = vmulps_avx512f(*(undefined1 (*) [64])ptr1,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar730;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar559._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
        auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
        auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
        auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
        auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
        fVar918 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x1c);
        fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 4);
        fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 8);
        fVar399 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        fVar400 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
        fVar401 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
        fVar402 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
        *(float *)*(undefined1 (*) [64])outptr =
             *(float *)*(undefined1 (*) [64])ptr1 * *(float *)*(undefined1 (*) [64])ptr;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ * fVar397;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar917._0_4_ * fVar398;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar914._0_4_ * fVar399;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar916._0_4_ * fVar400;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar913._0_4_ * fVar401;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar915._0_4_ * fVar402;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar918;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar559._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
        auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
        auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
        auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
        auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
        auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        *(float *)*(undefined1 (*) [64])outptr =
             *(float *)*(undefined1 (*) [64])ptr1 * *(float *)*(undefined1 (*) [64])ptr;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ * auVar916._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar917._0_4_ * auVar913._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar914._0_4_ * auVar915._0_4_;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
             *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4) *
             *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003a1c09;
      auVar559._0_4_ = *ptr;
      if (iVar421 == 4) {
        auVar941 = *(undefined1 (*) [16])ptr;
        auVar730 = ZEXT3264(CONCAT1616(auVar941,auVar941));
      }
      else {
        auVar941._4_4_ = auVar559._0_4_;
        auVar941._0_4_ = auVar559._0_4_;
        auVar941._8_4_ = auVar559._0_4_;
        auVar941._12_4_ = auVar559._0_4_;
        if (iVar421 == 8) {
          auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar1039._4_4_ = auVar559._0_4_;
          auVar1039._0_4_ = auVar559._0_4_;
          auVar1039._8_4_ = auVar559._0_4_;
          auVar1039._12_4_ = auVar559._0_4_;
          auVar1039._16_4_ = auVar559._0_4_;
          auVar1039._20_4_ = auVar559._0_4_;
          auVar1039._24_4_ = auVar559._0_4_;
          auVar730 = ZEXT3264(CONCAT428(auVar559._0_4_,auVar1039));
          if (iVar421 == 0x10) {
            auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_003ac6de;
          }
        }
      }
      auVar1039 = auVar730._0_28_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar730._0_32_,1);
LAB_003ac6de:
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar712 = vmulps_avx512f(auVar730,*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar1142._0_4_ = auVar1039._0_4_ * *(float *)*(undefined1 (*) [64])ptr1;
        auVar1142._4_4_ = auVar1039._4_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 4);
        auVar1142._8_4_ = auVar1039._8_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 8);
        auVar1142._12_4_ = auVar1039._12_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
        auVar1142._16_4_ = auVar1039._16_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        auVar1142._20_4_ = auVar1039._20_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
        auVar1142._28_36_ = auVar730._28_36_;
        auVar1142._24_4_ = auVar1039._24_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
        auVar730 = ZEXT3264(auVar1142._0_32_);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar1142._0_32_;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
        auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
        auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
        *(float *)*(undefined1 (*) [64])outptr =
             auVar941._0_4_ * *(float *)*(undefined1 (*) [64])ptr1;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar941._4_4_ * auVar917._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar941._8_4_ * auVar914._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar941._12_4_ * auVar916._0_4_;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
             auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4);
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    auVar559._0_4_ = *ptr1;
    if (iVar421 == 4) {
      auVar926 = *(undefined1 (*) [16])ptr1;
      auVar730 = ZEXT3264(CONCAT1616(auVar926,auVar926));
    }
    else {
      auVar926._4_4_ = auVar559._0_4_;
      auVar926._0_4_ = auVar559._0_4_;
      auVar926._8_4_ = auVar559._0_4_;
      auVar926._12_4_ = auVar559._0_4_;
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar1038._4_4_ = auVar559._0_4_;
        auVar1038._0_4_ = auVar559._0_4_;
        auVar1038._8_4_ = auVar559._0_4_;
        auVar1038._12_4_ = auVar559._0_4_;
        auVar1038._16_4_ = auVar559._0_4_;
        auVar1038._20_4_ = auVar559._0_4_;
        auVar1038._24_4_ = auVar559._0_4_;
        auVar730 = ZEXT3264(CONCAT428(auVar559._0_4_,auVar1038));
        if (iVar421 == 0x10) {
          auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_003aa602;
        }
      }
    }
    auVar1038 = auVar730._0_28_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar730._0_32_,1);
LAB_003aa602:
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      iVar421 = 0xf;
      do {
        auVar712 = vmulps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])outptr = auVar712;
        ptr = (float *)((long)ptr + 0x40);
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
    }
    uVar872 = uVar422 | 7;
    while ((int)uVar872 < (int)uVar424) {
      auVar1141._0_4_ = auVar1038._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
      auVar1141._4_4_ = auVar1038._4_4_ * *(float *)(*(undefined1 (*) [64])ptr + 4);
      auVar1141._8_4_ = auVar1038._8_4_ * *(float *)(*(undefined1 (*) [64])ptr + 8);
      auVar1141._12_4_ = auVar1038._12_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
      auVar1141._16_4_ = auVar1038._16_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
      auVar1141._20_4_ = auVar1038._20_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
      auVar1141._28_36_ = auVar730._28_36_;
      auVar1141._24_4_ = auVar1038._24_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
      auVar730 = ZEXT3264(auVar1141._0_32_);
      *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar1141._0_32_;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      uVar872 = uVar422 + 0xf;
      uVar422 = uVar422 + 8;
    }
    uVar872 = uVar422 | 3;
    while ((int)uVar872 < (int)uVar424) {
      auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
      auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
      auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
      *(float *)*(undefined1 (*) [64])outptr = auVar926._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
      *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar926._4_4_ * auVar917._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar926._8_4_ * auVar914._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar926._12_4_ * auVar916._0_4_;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      uVar872 = uVar422 + 7;
      uVar422 = uVar422 + 4;
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      ::_ps512_1[0] = ::_ps512_1[0];
      ::_ps512_1[1] = ::_ps512_1[1];
      ::_ps512_1[2] = ::_ps512_1[2];
      ::_ps512_1[3] = ::_ps512_1[3];
      ::_ps512_1[4] = ::_ps512_1[4];
      ::_ps512_1[5] = ::_ps512_1[5];
      ::_ps512_1[6] = ::_ps512_1[6];
      ::_ps512_1[7] = ::_ps512_1[7];
      ::_ps512_1[8] = ::_ps512_1[8];
      ::_ps512_1[9] = ::_ps512_1[9];
      ::_ps512_1[10] = ::_ps512_1[10];
      ::_ps512_1[0xb] = ::_ps512_1[0xb];
      ::_ps512_1[0xc] = ::_ps512_1[0xc];
      ::_ps512_1[0xd] = ::_ps512_1[0xd];
      ::_ps512_1[0xe] = ::_ps512_1[0xe];
      ::_ps512_1[0xf] = ::_ps512_1[0xf];
      ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
      ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
      ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
      ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
      ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
      ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
      ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
      ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
      ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
      ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
      ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
      ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
      ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
      ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
      ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
      ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
      ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
      ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
      ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
      ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
      ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
      ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
      ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
      ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
      ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
      ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
      ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
      ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
      ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
      ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
      ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
      ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
      ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
      ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
      ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
      ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
      ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
      ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
      ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
      ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
      ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
      ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
      ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
      ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
      ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
      ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
      ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
      ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
      ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
      ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
      ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
      ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
      ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
      ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
      ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
      ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
      ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
      ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
      ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
      ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
      ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
      ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
      ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
      ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
      ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
      ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
      ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
      ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
      ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
      ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
      ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
      ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
      ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
      ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
      ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
      ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
      ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
      ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
      ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
      ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
      ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
      ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
      ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
      ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
      ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
      ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
      ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
      ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
      ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
      ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
      ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
      ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
      ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
      ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
      ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
      ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
      ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
      ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
      ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
      ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
      ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
      ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
      ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
      ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
      ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
      ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
      ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
      ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
      ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
      ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
      ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
      ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
      ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
      ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
      ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
      ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
      ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
      ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
      ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
      ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
      ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
      ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
      ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
      ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
      ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
      ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
      ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
      ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
      ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
      ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
      ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
      ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
      ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
      ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
      ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
      ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
      ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
      ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
      ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
      ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
      ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
      ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
      ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
      ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
      ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
      ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
      ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
      ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
      ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
      ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
      ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
      ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
      ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
      ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
      ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
      ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
      ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
      ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
      ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
      ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
      _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
      _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
      _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
      _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
      _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
      _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
      _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
      _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
      _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
      _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
      _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
      _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
      _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
      _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
      _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
      _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
      _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
      _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
      _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
      _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
      _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
      _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
      _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
      _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
      _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
      _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
      _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
      _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
      _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
      _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
      _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
      _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
      _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
      _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
      _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
      _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
      _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
      _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
      _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
      _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
      _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
      _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
      _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
      _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
      _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
      _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
      _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
      _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
      _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
      _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
      _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
      _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
      _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
      _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
      _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
      _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
      _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
      _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
      _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
      _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
      _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
      _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
      _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
      _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
      _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
      _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
      _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
      _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
      _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
      _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
      _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
      _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
      _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
      _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
      _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
      _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
      _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
      _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
      _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
      _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
      _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
      _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
      _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
      _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
      _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
      _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
      _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
      _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
      _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
      _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
      _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
      _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
      _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
      _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
      _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
      _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
      _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
      _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
      _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
      _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
      _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
      _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
      _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
      _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
      _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
      _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
      _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
      _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
      _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
      _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
      _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
      _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
      _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
      _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
      _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
      _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
      _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
      _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
      _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
      _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
      _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
      _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
      _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
      _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
      _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
      _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
      _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
      _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
      _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
      _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
      _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
      _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
      _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
      _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
      _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
      _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
      _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
      _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
      _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
      _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
      _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
      _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
      _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
      _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
      _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
      _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
      _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
      _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
      _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
      _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
      _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
      _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
      _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
      _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
      _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
      _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
      _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
      _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
      _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
      _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
      _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
      _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
      _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
      _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
      _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
      _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
      _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
      _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
      _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
      _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
      _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
      _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
      _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
      _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
      _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
      _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
      _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
      _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
      _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
      _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
      _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
      _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
      _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
      _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
      _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
      _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
      _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
      _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
      _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
      _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
      _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
      _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
      _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
      _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
      _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
      _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
      _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
      _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
      _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
      _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
      _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
      _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
      _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
      _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
      _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
      _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
      _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
      _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
      _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
      _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
      _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
      _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
      _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
      _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
      _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
      _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
      _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
      _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
      _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
      _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
      _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
      _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
      _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
      _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
      return;
    }
    lVar425 = 0;
    do {
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
           auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  case 3:
    uVar422 = bw;
    if (bw < aw) {
      uVar422 = aw;
    }
    iVar421 = bp;
    if (bp < ap) {
      iVar421 = ap;
    }
    uVar424 = iVar421 * uVar422;
    if (ap != bp) {
LAB_003a1e35:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        uVar424 = uVar422;
        if (0 < (int)uVar422 && iVar421 == 0x10) {
          do {
            auVar730 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *ptr1)));
            auVar730 = vmulps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar424 = uVar424 - 1;
          } while (uVar424 != 0);
        }
        if (iVar421 == 8) {
          uVar424 = 0;
          if (1 < (int)uVar422) {
            iVar423 = 1;
            do {
              auVar559._0_4_ = *ptr1;
              auVar917._0_4_ = ptr1[1];
              auVar1044._4_4_ = auVar917._0_4_;
              auVar1044._0_4_ = auVar917._0_4_;
              auVar1044._8_4_ = auVar917._0_4_;
              auVar1044._12_4_ = auVar917._0_4_;
              auVar1044._16_4_ = auVar917._0_4_;
              auVar1044._20_4_ = auVar917._0_4_;
              auVar1044._24_4_ = auVar917._0_4_;
              auVar1044._28_4_ = auVar917._0_4_;
              auVar730 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                       CONCAT424(auVar559._0_4_,
                                                                 CONCAT420(auVar559._0_4_,
                                                                           CONCAT416(auVar559._0_4_,
                                                                                     CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar1044,1);
              auVar730 = vdivps_avx512f(*(undefined1 (*) [64])ptr,auVar730);
              *(undefined1 (*) [64])outptr = auVar730;
              ptr = (float *)((long)ptr + 0x40);
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar423 = iVar423 + 2;
            } while (iVar423 < (int)uVar422);
            uVar424 = uVar422 & 0x7ffffffe;
          }
          iVar423 = uVar422 - uVar424;
          if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
            do {
              fVar918 = 1.0 / *ptr1;
              auVar559._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
              auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
              auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
              auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
              auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
              auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
              *(float *)*(undefined1 (*) [64])outptr = fVar918 * *(float *)*(undefined1 (*) [64])ptr
              ;
              *(float *)((long)*(undefined1 (*) [64])outptr + 4) = fVar918 * auVar559._0_4_;
              *(float *)((long)*(undefined1 (*) [64])outptr + 8) = fVar918 * auVar917._0_4_;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = fVar918 * auVar914._0_4_;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = fVar918 * auVar916._0_4_;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = fVar918 * auVar913._0_4_;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = fVar918 * auVar915._0_4_;
              *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar918;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar423 = iVar423 + -1;
            } while (iVar423 != 0);
          }
        }
        if (iVar421 != 4) {
          return;
        }
        uVar424 = 0;
        if (3 < (int)uVar422) {
          iVar421 = 3;
          do {
            auVar559._0_4_ = ptr1[2];
            auVar971._4_4_ = auVar559._0_4_;
            auVar971._0_4_ = auVar559._0_4_;
            auVar971._8_4_ = auVar559._0_4_;
            auVar971._12_4_ = auVar559._0_4_;
            auVar559._0_4_ = ptr1[3];
            auVar971._20_4_ = auVar559._0_4_;
            auVar971._16_4_ = auVar559._0_4_;
            auVar971._24_4_ = auVar559._0_4_;
            auVar971._28_4_ = auVar559._0_4_;
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar730 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                                CONCAT48(auVar917._0_4_,
                                                                         CONCAT44(auVar917._0_4_,
                                                                                  auVar917._0_4_))),
                                                      CONCAT412(auVar559._0_4_,
                                                                CONCAT48(auVar559._0_4_,
                                                                         CONCAT44(auVar559._0_4_,
                                                                                  auVar559._0_4_))))
                                          ),auVar971,1);
            auVar730 = vdivps_avx512f(*(undefined1 (*) [64])ptr,auVar730);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 4;
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 4;
          } while (iVar421 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffc;
        }
        uVar872 = uVar424 | 1;
        while ((int)uVar872 < (int)uVar422) {
          auVar559._0_4_ = *ptr1;
          auVar972._4_4_ = auVar559._0_4_;
          auVar972._0_4_ = auVar559._0_4_;
          auVar972._8_4_ = auVar559._0_4_;
          auVar972._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[1];
          auVar972._20_4_ = auVar559._0_4_;
          auVar972._16_4_ = auVar559._0_4_;
          auVar972._24_4_ = auVar559._0_4_;
          auVar972._28_4_ = auVar559._0_4_;
          auVar671 = vdivps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar972);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar872 = uVar424 + 3;
          uVar424 = uVar424 + 2;
        }
        iVar421 = uVar422 - uVar424;
        if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar425 = 0;
        do {
          auVar916._0_4_ = 1.0 / *(float *)((long)ptr1 + lVar425);
          pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
          auVar559._0_4_ = pfVar9[1];
          auVar917._0_4_ = pfVar9[2];
          auVar914._0_4_ = pfVar9[3];
          pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4);
          *pfVar10 = auVar916._0_4_ * *pfVar9;
          pfVar10[1] = auVar916._0_4_ * auVar559._0_4_;
          pfVar10[2] = auVar916._0_4_ * auVar917._0_4_;
          pfVar10[3] = auVar916._0_4_ * auVar914._0_4_;
          lVar425 = lVar425 + 4;
          iVar421 = iVar421 + -1;
        } while (iVar421 != 0);
        return;
      }
      if (bw == 1) {
        auVar559._0_4_ = *ptr1;
        uVar422 = 0;
        if (0xf < (int)uVar424) {
          auVar730 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / auVar559._0_4_)));
          iVar421 = 0xf;
          do {
            in_ZMM2 = vmulps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = in_ZMM2;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 0x10;
          } while (iVar421 < (int)uVar424);
          uVar422 = uVar424 & 0x7ffffff0;
          auVar559._0_4_ = *ptr1;
        }
        auVar559._0_4_ = 1.0 / auVar559._0_4_;
        uVar872 = uVar422;
        if ((int)(uVar422 | 7) < (int)uVar424) {
          do {
            auVar1088._0_4_ = auVar559._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
            auVar1088._4_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar1088._8_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar1088._12_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar1088._16_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            auVar1088._20_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            auVar1088._28_36_ = in_ZMM2._28_36_;
            auVar1088._24_4_ = auVar559._0_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            in_ZMM2 = ZEXT3264(auVar1088._0_32_);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar1088._0_32_;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar422 = uVar872 + 8;
            iVar421 = uVar872 + 0xf;
            uVar872 = uVar422;
          } while (iVar421 < (int)uVar424);
          auVar559._0_4_ = 1.0 / *ptr1;
        }
        if ((int)uVar424 <= (int)(uVar422 | 3)) {
          return;
        }
        lVar425 = 0;
        do {
          pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
          auVar917._0_4_ = pfVar9[1];
          auVar914._0_4_ = pfVar9[2];
          auVar916._0_4_ = pfVar9[3];
          pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4);
          *pfVar10 = auVar559._0_4_ * *pfVar9;
          pfVar10[1] = auVar559._0_4_ * auVar917._0_4_;
          pfVar10[2] = auVar559._0_4_ * auVar914._0_4_;
          pfVar10[3] = auVar559._0_4_ * auVar916._0_4_;
          lVar425 = lVar425 + 4;
        } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar421 == 0x10) {
        auVar730 = *(undefined1 (*) [64])ptr;
        uVar424 = uVar422;
        do {
          auVar712 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / *ptr1)));
          auVar712 = vmulps_avx512f(auVar730,auVar712);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
        } while (uVar424 != 0);
      }
      if (iVar421 == 8) {
        auVar730 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        uVar424 = 0;
        if (1 < (int)uVar422) {
          iVar423 = 1;
          do {
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar1055._4_4_ = auVar917._0_4_;
            auVar1055._0_4_ = auVar917._0_4_;
            auVar1055._8_4_ = auVar917._0_4_;
            auVar1055._12_4_ = auVar917._0_4_;
            auVar1055._16_4_ = auVar917._0_4_;
            auVar1055._20_4_ = auVar917._0_4_;
            auVar1055._24_4_ = auVar917._0_4_;
            auVar1055._28_4_ = auVar917._0_4_;
            auVar712 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                     CONCAT424(auVar559._0_4_,
                                                               CONCAT420(auVar559._0_4_,
                                                                         CONCAT416(auVar559._0_4_,
                                                                                   CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar1055,1);
            auVar712 = vdivps_avx512f(auVar730,auVar712);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          do {
            auVar559._0_4_ = 1.0 / *ptr1;
            *(float *)*(undefined1 (*) [64])outptr = auVar730._0_4_ * auVar559._0_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar730._4_4_ * auVar559._0_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar730._8_4_ * auVar559._0_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar730._12_4_ * auVar559._0_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar730._16_4_ * auVar559._0_4_
            ;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar730._20_4_ * auVar559._0_4_
            ;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar730._24_4_ * auVar559._0_4_
            ;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar559._0_4_;
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      if (iVar421 != 4) {
        return;
      }
      auVar730 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      uVar424 = 0;
      if (3 < (int)uVar422) {
        iVar421 = 3;
        do {
          auVar559._0_4_ = ptr1[2];
          auVar988._4_4_ = auVar559._0_4_;
          auVar988._0_4_ = auVar559._0_4_;
          auVar988._8_4_ = auVar559._0_4_;
          auVar988._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[3];
          auVar988._20_4_ = auVar559._0_4_;
          auVar988._16_4_ = auVar559._0_4_;
          auVar988._24_4_ = auVar559._0_4_;
          auVar988._28_4_ = auVar559._0_4_;
          auVar559._0_4_ = *ptr1;
          auVar917._0_4_ = ptr1[1];
          auVar712 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                              CONCAT48(auVar917._0_4_,
                                                                       CONCAT44(auVar917._0_4_,
                                                                                auVar917._0_4_))),
                                                    CONCAT412(auVar559._0_4_,
                                                              CONCAT48(auVar559._0_4_,
                                                                       CONCAT44(auVar559._0_4_,
                                                                                auVar559._0_4_))))),
                                auVar988,1);
          auVar712 = vdivps_avx512f(auVar730,auVar712);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      if ((int)(uVar424 | 1) < (int)uVar422) {
        auVar989._16_16_ = auVar730._0_16_;
        auVar989._0_16_ = auVar730._0_16_;
        uVar872 = uVar424;
        do {
          auVar559._0_4_ = *ptr1;
          auVar1056._4_4_ = auVar559._0_4_;
          auVar1056._0_4_ = auVar559._0_4_;
          auVar1056._8_4_ = auVar559._0_4_;
          auVar1056._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[1];
          auVar1056._20_4_ = auVar559._0_4_;
          auVar1056._16_4_ = auVar559._0_4_;
          auVar1056._24_4_ = auVar559._0_4_;
          auVar1056._28_4_ = auVar559._0_4_;
          auVar671 = vdivps_avx(auVar989,auVar1056);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar424 = uVar872 + 2;
          iVar421 = uVar872 + 3;
          uVar872 = uVar424;
        } while (iVar421 < (int)uVar422);
      }
      if ((int)uVar422 <= (int)uVar424) {
        return;
      }
      lVar425 = 0;
      do {
        auVar559._0_4_ = 1.0 / ptr1[lVar425];
        *(float *)*(undefined1 (*) [64])outptr = auVar730._0_4_ * auVar559._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar730._4_4_ * auVar559._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar730._8_4_ * auVar559._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar730._12_4_ * auVar559._0_4_;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        lVar425 = lVar425 + 1;
      } while (uVar422 - uVar424 != (int)lVar425);
      return;
    }
    if (aw == bw) {
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar730 = vdivps_avx512f(*(undefined1 (*) [64])ptr,*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [64])outptr = auVar730;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar671 = vdivps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                              *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar462 = vdivps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,
                              *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
             *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4) /
             *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4);
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003a1e35;
      auVar559._0_4_ = *ptr;
      if (iVar421 == 4) {
        auVar942 = *(undefined1 (*) [16])ptr;
        auVar730 = ZEXT3264(CONCAT1616(auVar942,auVar942));
      }
      else {
        auVar942._4_4_ = auVar559._0_4_;
        auVar942._0_4_ = auVar559._0_4_;
        auVar942._8_4_ = auVar559._0_4_;
        auVar942._12_4_ = auVar559._0_4_;
        if (iVar421 == 8) {
          auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar1078._4_4_ = auVar559._0_4_;
          auVar1078._0_4_ = auVar559._0_4_;
          auVar1078._8_4_ = auVar559._0_4_;
          auVar1078._12_4_ = auVar559._0_4_;
          auVar1078._16_4_ = auVar559._0_4_;
          auVar1078._20_4_ = auVar559._0_4_;
          auVar1078._24_4_ = auVar559._0_4_;
          auVar1078._28_4_ = auVar559._0_4_;
          auVar730 = ZEXT3264(auVar1078);
          if (iVar421 == 0x10) {
            auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_003ac79b;
          }
        }
      }
      auVar1078 = auVar730._0_32_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar1078,1);
LAB_003ac79b:
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar712 = vdivps_avx512f(auVar730,*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar671 = vdivps_avx(auVar1078,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar462 = vdivps_avx(auVar942,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
             auVar559._0_4_ / *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4);
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    auVar559._0_4_ = *ptr1;
    if (iVar421 == 4) {
      auVar927 = *(undefined1 (*) [16])ptr1;
      auVar730 = ZEXT3264(CONCAT1616(auVar927,auVar927));
    }
    else {
      auVar927._4_4_ = auVar559._0_4_;
      auVar927._0_4_ = auVar559._0_4_;
      auVar927._8_4_ = auVar559._0_4_;
      auVar927._12_4_ = auVar559._0_4_;
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar1069._4_4_ = auVar559._0_4_;
        auVar1069._0_4_ = auVar559._0_4_;
        auVar1069._8_4_ = auVar559._0_4_;
        auVar1069._12_4_ = auVar559._0_4_;
        auVar1069._16_4_ = auVar559._0_4_;
        auVar1069._20_4_ = auVar559._0_4_;
        auVar1069._24_4_ = auVar559._0_4_;
        auVar1069._28_4_ = auVar559._0_4_;
        auVar730 = ZEXT3264(auVar1069);
        if (iVar421 == 0x10) {
          auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_003aa6da;
        }
      }
    }
    auVar1069 = auVar730._0_32_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar1069,1);
LAB_003aa6da:
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      auVar712 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar730 = vdivps_avx512f(auVar712,auVar730);
      iVar421 = 0xf;
      do {
        auVar712 = vmulps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])outptr = auVar712;
        ptr = (float *)((long)ptr + 0x40);
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
    }
    if ((int)(uVar422 | 7) < (int)uVar424) {
      auVar1131._8_4_ = 0x3f800000;
      auVar1131._0_8_ = 0x3f8000003f800000;
      auVar1131._12_4_ = 0x3f800000;
      auVar1131._16_4_ = 0x3f800000;
      auVar1131._20_4_ = 0x3f800000;
      auVar1131._24_4_ = 0x3f800000;
      auVar1131._28_4_ = 0x3f800000;
      auVar671 = vdivps_avx(auVar1131,auVar1069);
      uVar872 = uVar422;
      do {
        auVar395._4_4_ = auVar671._4_4_ * *(float *)(*(undefined1 (*) [64])ptr + 4);
        auVar395._0_4_ = auVar671._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
        auVar395._8_4_ = auVar671._8_4_ * *(float *)(*(undefined1 (*) [64])ptr + 8);
        auVar395._12_4_ = auVar671._12_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        auVar395._16_4_ = auVar671._16_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x10);
        auVar395._20_4_ = auVar671._20_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x14);
        auVar395._24_4_ = auVar671._24_4_ * *(float *)(*(undefined1 (*) [64])ptr + 0x18);
        auVar395._28_4_ = auVar1131._28_4_;
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar395;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar422 = uVar872 + 8;
        iVar421 = uVar872 + 0xf;
        uVar872 = uVar422;
        auVar1131 = auVar395;
      } while (iVar421 < (int)uVar424);
    }
    if ((int)(uVar422 | 3) < (int)uVar424) {
      auVar1027._8_4_ = 0x3f800000;
      auVar1027._0_8_ = 0x3f8000003f800000;
      auVar1027._12_4_ = 0x3f800000;
      auVar462 = vdivps_avx(auVar1027,auVar927);
      uVar872 = uVar422;
      do {
        auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
        auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
        auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        *(float *)*(undefined1 (*) [64])outptr =
             auVar462._0_4_ * *(float *)*(undefined1 (*) [64])ptr;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar462._4_4_ * auVar917._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar462._8_4_ * auVar914._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar462._12_4_ * auVar916._0_4_;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar422 = uVar872 + 4;
        iVar421 = uVar872 + 7;
        uVar872 = uVar422;
      } while (iVar421 < (int)uVar424);
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      return;
    }
    lVar425 = 0;
    do {
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
           (1.0 / auVar559._0_4_) * *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  case 4:
    uVar422 = bw;
    if (bw < aw) {
      uVar422 = aw;
    }
    iVar421 = bp;
    if (bp < ap) {
      iVar421 = ap;
    }
    uVar424 = iVar421 * uVar422;
    if (ap != bp) {
LAB_003a0634:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        uVar424 = uVar422;
        if (0 < (int)uVar422 && iVar421 == 0x10) {
          do {
            auVar559._0_4_ = *ptr1;
            auVar363._4_4_ = auVar559._0_4_;
            auVar363._0_4_ = auVar559._0_4_;
            auVar363._8_4_ = auVar559._0_4_;
            auVar363._12_4_ = auVar559._0_4_;
            auVar363._16_4_ = auVar559._0_4_;
            auVar363._20_4_ = auVar559._0_4_;
            auVar363._24_4_ = auVar559._0_4_;
            auVar363._28_4_ = auVar559._0_4_;
            auVar363._32_4_ = auVar559._0_4_;
            auVar363._36_4_ = auVar559._0_4_;
            auVar363._40_4_ = auVar559._0_4_;
            auVar363._44_4_ = auVar559._0_4_;
            auVar363._48_4_ = auVar559._0_4_;
            auVar363._52_4_ = auVar559._0_4_;
            auVar363._56_4_ = auVar559._0_4_;
            auVar363._60_4_ = auVar559._0_4_;
            auVar730 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,auVar363);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar424 = uVar424 - 1;
          } while (uVar424 != 0);
        }
        if (iVar421 == 8) {
          uVar424 = 0;
          if (1 < (int)uVar422) {
            iVar423 = 1;
            do {
              auVar559._0_4_ = *ptr1;
              auVar917._0_4_ = ptr1[1];
              auVar965._4_4_ = auVar917._0_4_;
              auVar965._0_4_ = auVar917._0_4_;
              auVar965._8_4_ = auVar917._0_4_;
              auVar965._12_4_ = auVar917._0_4_;
              auVar965._16_4_ = auVar917._0_4_;
              auVar965._20_4_ = auVar917._0_4_;
              auVar965._24_4_ = auVar917._0_4_;
              auVar965._28_4_ = auVar917._0_4_;
              auVar730 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                       CONCAT424(auVar559._0_4_,
                                                                 CONCAT420(auVar559._0_4_,
                                                                           CONCAT416(auVar559._0_4_,
                                                                                     CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar965,1);
              auVar730 = vmaxps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
              *(undefined1 (*) [64])outptr = auVar730;
              ptr = (float *)((long)ptr + 0x40);
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar423 = iVar423 + 2;
            } while (iVar423 < (int)uVar422);
            uVar424 = uVar422 & 0x7ffffffe;
          }
          iVar423 = uVar422 - uVar424;
          if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
            do {
              auVar559._0_4_ = *ptr1;
              auVar318._4_4_ = auVar559._0_4_;
              auVar318._0_4_ = auVar559._0_4_;
              auVar318._8_4_ = auVar559._0_4_;
              auVar318._12_4_ = auVar559._0_4_;
              auVar318._16_4_ = auVar559._0_4_;
              auVar318._20_4_ = auVar559._0_4_;
              auVar318._24_4_ = auVar559._0_4_;
              auVar318._28_4_ = auVar559._0_4_;
              auVar671 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar318);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar423 = iVar423 + -1;
            } while (iVar423 != 0);
          }
        }
        if (iVar421 != 4) {
          return;
        }
        uVar424 = 0;
        if (3 < (int)uVar422) {
          iVar421 = 3;
          do {
            auVar559._0_4_ = ptr1[2];
            auVar895._4_4_ = auVar559._0_4_;
            auVar895._0_4_ = auVar559._0_4_;
            auVar895._8_4_ = auVar559._0_4_;
            auVar895._12_4_ = auVar559._0_4_;
            auVar559._0_4_ = ptr1[3];
            auVar895._20_4_ = auVar559._0_4_;
            auVar895._16_4_ = auVar559._0_4_;
            auVar895._24_4_ = auVar559._0_4_;
            auVar895._28_4_ = auVar559._0_4_;
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar730 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                                CONCAT48(auVar917._0_4_,
                                                                         CONCAT44(auVar917._0_4_,
                                                                                  auVar917._0_4_))),
                                                      CONCAT412(auVar559._0_4_,
                                                                CONCAT48(auVar559._0_4_,
                                                                         CONCAT44(auVar559._0_4_,
                                                                                  auVar559._0_4_))))
                                          ),auVar895,1);
            auVar730 = vmaxps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 4;
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 4;
          } while (iVar421 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffc;
        }
        uVar872 = uVar424 | 1;
        while ((int)uVar872 < (int)uVar422) {
          auVar559._0_4_ = *ptr1;
          auVar896._4_4_ = auVar559._0_4_;
          auVar896._0_4_ = auVar559._0_4_;
          auVar896._8_4_ = auVar559._0_4_;
          auVar896._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[1];
          auVar896._20_4_ = auVar559._0_4_;
          auVar896._16_4_ = auVar559._0_4_;
          auVar896._24_4_ = auVar559._0_4_;
          auVar896._28_4_ = auVar559._0_4_;
          auVar671 = vmaxps_avx(auVar896,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar872 = uVar424 + 3;
          uVar424 = uVar424 + 2;
        }
        iVar421 = uVar422 - uVar424;
        if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar425 = 0;
        do {
          uVar880 = *(undefined4 *)((long)ptr1 + lVar425);
          auVar161._4_4_ = uVar880;
          auVar161._0_4_ = uVar880;
          auVar161._8_4_ = uVar880;
          auVar161._12_4_ = uVar880;
          auVar462 = vmaxps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4)
                                     ,auVar161);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462;
          lVar425 = lVar425 + 4;
          iVar421 = iVar421 + -1;
        } while (iVar421 != 0);
        return;
      }
      if (bw == 1) {
        auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        if ((int)uVar424 < 0x10) {
          uVar422 = 0;
        }
        else {
          iVar421 = 0xf;
          do {
            auVar712 = vmaxps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 0x10;
          } while (iVar421 < (int)uVar424);
          uVar422 = uVar424 & 0x7ffffff0;
          auVar730 = ZEXT464((uint)*ptr1);
        }
        auVar913._0_4_ = auVar730._0_4_;
        if ((int)(uVar422 | 7) < (int)uVar424) {
          auVar913._4_4_ = auVar913._0_4_;
          auVar913._8_4_ = auVar913._0_4_;
          auVar913._12_4_ = auVar913._0_4_;
          auVar913._16_4_ = auVar913._0_4_;
          auVar913._20_4_ = auVar913._0_4_;
          auVar913._24_4_ = auVar913._0_4_;
          auVar913._28_4_ = auVar913._0_4_;
          uVar872 = uVar422;
          do {
            auVar671 = vmaxps_avx(auVar913,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar422 = uVar872 + 8;
            iVar421 = uVar872 + 0xf;
            uVar872 = uVar422;
          } while (iVar421 < (int)uVar424);
          auVar913._0_4_ = *ptr1;
        }
        if ((int)uVar424 <= (int)(uVar422 | 3)) {
          return;
        }
        auVar884._4_4_ = auVar913._0_4_;
        auVar884._0_4_ = auVar913._0_4_;
        auVar884._8_4_ = auVar913._0_4_;
        auVar884._12_4_ = auVar913._0_4_;
        lVar425 = 0;
        do {
          auVar462 = vmaxps_avx(auVar884,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar425 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462;
          lVar425 = lVar425 + 4;
        } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar421 == 0x10) {
        auVar730 = *(undefined1 (*) [64])ptr;
        uVar424 = uVar422;
        do {
          auVar559._0_4_ = *ptr1;
          auVar364._4_4_ = auVar559._0_4_;
          auVar364._0_4_ = auVar559._0_4_;
          auVar364._8_4_ = auVar559._0_4_;
          auVar364._12_4_ = auVar559._0_4_;
          auVar364._16_4_ = auVar559._0_4_;
          auVar364._20_4_ = auVar559._0_4_;
          auVar364._24_4_ = auVar559._0_4_;
          auVar364._28_4_ = auVar559._0_4_;
          auVar364._32_4_ = auVar559._0_4_;
          auVar364._36_4_ = auVar559._0_4_;
          auVar364._40_4_ = auVar559._0_4_;
          auVar364._44_4_ = auVar559._0_4_;
          auVar364._48_4_ = auVar559._0_4_;
          auVar364._52_4_ = auVar559._0_4_;
          auVar364._56_4_ = auVar559._0_4_;
          auVar364._60_4_ = auVar559._0_4_;
          auVar712 = vmaxps_avx512f(auVar730,auVar364);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
        } while (uVar424 != 0);
      }
      if (iVar421 == 8) {
        auVar730 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        uVar424 = 0;
        if (1 < (int)uVar422) {
          iVar423 = 1;
          do {
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar1050._4_4_ = auVar917._0_4_;
            auVar1050._0_4_ = auVar917._0_4_;
            auVar1050._8_4_ = auVar917._0_4_;
            auVar1050._12_4_ = auVar917._0_4_;
            auVar1050._16_4_ = auVar917._0_4_;
            auVar1050._20_4_ = auVar917._0_4_;
            auVar1050._24_4_ = auVar917._0_4_;
            auVar1050._28_4_ = auVar917._0_4_;
            auVar712 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                     CONCAT424(auVar559._0_4_,
                                                               CONCAT420(auVar559._0_4_,
                                                                         CONCAT416(auVar559._0_4_,
                                                                                   CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar1050,1);
            auVar712 = vmaxps_avx512f(auVar730,auVar712);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          do {
            auVar559._0_4_ = *ptr1;
            auVar319._4_4_ = auVar559._0_4_;
            auVar319._0_4_ = auVar559._0_4_;
            auVar319._8_4_ = auVar559._0_4_;
            auVar319._12_4_ = auVar559._0_4_;
            auVar319._16_4_ = auVar559._0_4_;
            auVar319._20_4_ = auVar559._0_4_;
            auVar319._24_4_ = auVar559._0_4_;
            auVar319._28_4_ = auVar559._0_4_;
            auVar671 = vmaxps_avx512vl(auVar730._0_32_,auVar319);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      if (iVar421 != 4) {
        return;
      }
      auVar730 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      uVar424 = 0;
      if (3 < (int)uVar422) {
        iVar421 = 3;
        do {
          auVar559._0_4_ = ptr1[2];
          auVar985._4_4_ = auVar559._0_4_;
          auVar985._0_4_ = auVar559._0_4_;
          auVar985._8_4_ = auVar559._0_4_;
          auVar985._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[3];
          auVar985._20_4_ = auVar559._0_4_;
          auVar985._16_4_ = auVar559._0_4_;
          auVar985._24_4_ = auVar559._0_4_;
          auVar985._28_4_ = auVar559._0_4_;
          auVar559._0_4_ = *ptr1;
          auVar917._0_4_ = ptr1[1];
          auVar712 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                              CONCAT48(auVar917._0_4_,
                                                                       CONCAT44(auVar917._0_4_,
                                                                                auVar917._0_4_))),
                                                    CONCAT412(auVar559._0_4_,
                                                              CONCAT48(auVar559._0_4_,
                                                                       CONCAT44(auVar559._0_4_,
                                                                                auVar559._0_4_))))),
                                auVar985,1);
          auVar712 = vmaxps_avx512f(auVar730,auVar712);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      auVar462 = auVar730._0_16_;
      if ((int)(uVar424 | 1) < (int)uVar422) {
        auVar986._16_16_ = auVar462;
        auVar986._0_16_ = auVar462;
        uVar872 = uVar424;
        do {
          auVar559._0_4_ = *ptr1;
          auVar1051._4_4_ = auVar559._0_4_;
          auVar1051._0_4_ = auVar559._0_4_;
          auVar1051._8_4_ = auVar559._0_4_;
          auVar1051._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[1];
          auVar1051._20_4_ = auVar559._0_4_;
          auVar1051._16_4_ = auVar559._0_4_;
          auVar1051._24_4_ = auVar559._0_4_;
          auVar1051._28_4_ = auVar559._0_4_;
          auVar671 = vmaxps_avx(auVar986,auVar1051);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar424 = uVar872 + 2;
          iVar421 = uVar872 + 3;
          uVar872 = uVar424;
        } while (iVar421 < (int)uVar422);
      }
      if ((int)uVar422 <= (int)uVar424) {
        return;
      }
      lVar425 = 0;
      do {
        auVar559._0_4_ = ptr1[lVar425];
        auVar162._4_4_ = auVar559._0_4_;
        auVar162._0_4_ = auVar559._0_4_;
        auVar162._8_4_ = auVar559._0_4_;
        auVar162._12_4_ = auVar559._0_4_;
        auVar492 = vmaxps_avx512vl(auVar462,auVar162);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar492;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        lVar425 = lVar425 + 1;
      } while (uVar422 - uVar424 != (int)lVar425);
      return;
    }
    if (aw == bw) {
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar730 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [64])outptr = auVar730;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar671 = vmaxps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                              *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar462 = vmaxps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,
                              *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        auVar462 = vmaxss_avx(ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4)),
                              ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr + lVar425 * 4)));
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003a0634;
      auVar559._0_4_ = *ptr;
      if (iVar421 == 4) {
        auVar939 = *(undefined1 (*) [16])ptr;
        auVar730 = ZEXT3264(CONCAT1616(auVar939,auVar939));
      }
      else {
        auVar939._4_4_ = auVar559._0_4_;
        auVar939._0_4_ = auVar559._0_4_;
        auVar939._8_4_ = auVar559._0_4_;
        auVar939._12_4_ = auVar559._0_4_;
        if (iVar421 == 8) {
          auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar1077._4_4_ = auVar559._0_4_;
          auVar1077._0_4_ = auVar559._0_4_;
          auVar1077._8_4_ = auVar559._0_4_;
          auVar1077._12_4_ = auVar559._0_4_;
          auVar1077._16_4_ = auVar559._0_4_;
          auVar1077._20_4_ = auVar559._0_4_;
          auVar1077._24_4_ = auVar559._0_4_;
          auVar1077._28_4_ = auVar559._0_4_;
          auVar730 = ZEXT3264(auVar1077);
          if (iVar421 == 0x10) {
            auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_003abe98;
          }
        }
      }
      auVar1077 = auVar730._0_32_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar1077,1);
LAB_003abe98:
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar712 = vmaxps_avx512f(auVar730,*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar671 = vmaxps_avx(auVar1077,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar462 = vmaxps_avx(auVar939,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        auVar462 = vmaxss_avx(ZEXT416((uint)auVar559._0_4_),
                              ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4)));
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    auVar559._0_4_ = *ptr1;
    if (iVar421 == 4) {
      auVar925 = *(undefined1 (*) [16])ptr1;
      auVar730 = ZEXT3264(CONCAT1616(auVar925,auVar925));
    }
    else {
      auVar925._4_4_ = auVar559._0_4_;
      auVar925._0_4_ = auVar559._0_4_;
      auVar925._8_4_ = auVar559._0_4_;
      auVar925._12_4_ = auVar559._0_4_;
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar1067._4_4_ = auVar559._0_4_;
        auVar1067._0_4_ = auVar559._0_4_;
        auVar1067._8_4_ = auVar559._0_4_;
        auVar1067._12_4_ = auVar559._0_4_;
        auVar1067._16_4_ = auVar559._0_4_;
        auVar1067._20_4_ = auVar559._0_4_;
        auVar1067._24_4_ = auVar559._0_4_;
        auVar1067._28_4_ = auVar559._0_4_;
        auVar730 = ZEXT3264(auVar1067);
        if (iVar421 == 0x10) {
          auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_003a9e66;
        }
      }
    }
    auVar1067 = auVar730._0_32_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar1067,1);
LAB_003a9e66:
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      iVar421 = 0xf;
      do {
        auVar712 = vmaxps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])outptr = auVar712;
        ptr = (float *)((long)ptr + 0x40);
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
    }
    uVar872 = uVar422 | 7;
    while ((int)uVar872 < (int)uVar424) {
      auVar671 = vmaxps_avx(auVar1067,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
      *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      uVar872 = uVar422 + 0xf;
      uVar422 = uVar422 + 8;
    }
    uVar872 = uVar422 | 3;
    while ((int)uVar872 < (int)uVar424) {
      auVar462 = vmaxps_avx(auVar925,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      uVar872 = uVar422 + 7;
      uVar422 = uVar422 + 4;
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      ::_ps512_1[0] = ::_ps512_1[0];
      ::_ps512_1[1] = ::_ps512_1[1];
      ::_ps512_1[2] = ::_ps512_1[2];
      ::_ps512_1[3] = ::_ps512_1[3];
      ::_ps512_1[4] = ::_ps512_1[4];
      ::_ps512_1[5] = ::_ps512_1[5];
      ::_ps512_1[6] = ::_ps512_1[6];
      ::_ps512_1[7] = ::_ps512_1[7];
      ::_ps512_1[8] = ::_ps512_1[8];
      ::_ps512_1[9] = ::_ps512_1[9];
      ::_ps512_1[10] = ::_ps512_1[10];
      ::_ps512_1[0xb] = ::_ps512_1[0xb];
      ::_ps512_1[0xc] = ::_ps512_1[0xc];
      ::_ps512_1[0xd] = ::_ps512_1[0xd];
      ::_ps512_1[0xe] = ::_ps512_1[0xe];
      ::_ps512_1[0xf] = ::_ps512_1[0xf];
      ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
      ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
      ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
      ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
      ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
      ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
      ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
      ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
      ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
      ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
      ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
      ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
      ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
      ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
      ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
      ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
      ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
      ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
      ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
      ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
      ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
      ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
      ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
      ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
      ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
      ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
      ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
      ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
      ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
      ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
      ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
      ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
      ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
      ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
      ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
      ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
      ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
      ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
      ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
      ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
      ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
      ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
      ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
      ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
      ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
      ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
      ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
      ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
      ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
      ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
      ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
      ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
      ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
      ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
      ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
      ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
      ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
      ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
      ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
      ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
      ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
      ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
      ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
      ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
      ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
      ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
      ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
      ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
      ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
      ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
      ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
      ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
      ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
      ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
      ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
      ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
      ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
      ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
      ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
      ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
      ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
      ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
      ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
      ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
      ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
      ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
      ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
      ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
      ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
      ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
      ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
      ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
      ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
      ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
      ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
      ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
      ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
      ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
      ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
      ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
      ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
      ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
      ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
      ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
      ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
      ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
      ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
      ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
      ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
      ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
      ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
      ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
      ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
      ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
      ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
      ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
      ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
      ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
      ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
      ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
      ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
      ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
      ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
      ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
      ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
      ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
      ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
      ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
      ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
      ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
      ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
      ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
      ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
      ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
      ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
      ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
      ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
      ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
      ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
      ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
      ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
      ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
      ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
      ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
      ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
      ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
      ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
      ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
      ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
      ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
      ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
      ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
      ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
      ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
      ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
      ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
      ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
      ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
      ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
      ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
      _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
      _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
      _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
      _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
      _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
      _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
      _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
      _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
      _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
      _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
      _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
      _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
      _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
      _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
      _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
      _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
      _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
      _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
      _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
      _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
      _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
      _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
      _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
      _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
      _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
      _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
      _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
      _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
      _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
      _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
      _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
      _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
      _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
      _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
      _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
      _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
      _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
      _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
      _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
      _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
      _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
      _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
      _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
      _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
      _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
      _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
      _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
      _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
      _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
      _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
      _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
      _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
      _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
      _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
      _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
      _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
      _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
      _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
      _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
      _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
      _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
      _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
      _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
      _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
      _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
      _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
      _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
      _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
      _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
      _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
      _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
      _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
      _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
      _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
      _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
      _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
      _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
      _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
      _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
      _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
      _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
      _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
      _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
      _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
      _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
      _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
      _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
      _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
      _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
      _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
      _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
      _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
      _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
      _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
      _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
      _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
      _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
      _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
      _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
      _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
      _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
      _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
      _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
      _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
      _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
      _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
      _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
      _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
      _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
      _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
      _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
      _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
      _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
      _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
      _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
      _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
      _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
      _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
      _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
      _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
      _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
      _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
      _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
      _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
      _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
      _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
      _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
      _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
      _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
      _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
      _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
      _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
      _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
      _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
      _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
      _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
      _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
      _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
      _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
      _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
      _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
      _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
      _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
      _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
      _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
      _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
      _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
      _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
      _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
      _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
      _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
      _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
      _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
      _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
      _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
      _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
      _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
      _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
      _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
      _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
      _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
      _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
      _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
      _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
      _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
      _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
      _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
      _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
      _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
      _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
      _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
      _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
      _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
      _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
      _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
      _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
      _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
      _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
      _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
      _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
      _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
      _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
      _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
      _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
      _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
      _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
      _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
      _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
      _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
      _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
      _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
      _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
      _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
      _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
      _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
      _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
      _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
      _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
      _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
      _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
      _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
      _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
      _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
      _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
      _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
      _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
      _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
      _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
      _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
      _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
      _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
      _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
      _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
      _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
      _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
      _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
      _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
      _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
      _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
      _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
      _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
      _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
      _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
      _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
      return;
    }
    lVar425 = 0;
    do {
      auVar462 = vmaxss_avx(ZEXT416((uint)auVar559._0_4_),
                            ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr + lVar425 * 4)));
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462._0_4_;
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  case 5:
    uVar422 = bw;
    if (bw < aw) {
      uVar422 = aw;
    }
    iVar421 = bp;
    if (bp < ap) {
      iVar421 = ap;
    }
    uVar424 = iVar421 * uVar422;
    if (ap != bp) {
LAB_003a2797:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        uVar424 = uVar422;
        if (0 < (int)uVar422 && iVar421 == 0x10) {
          do {
            auVar559._0_4_ = *ptr1;
            auVar361._4_4_ = auVar559._0_4_;
            auVar361._0_4_ = auVar559._0_4_;
            auVar361._8_4_ = auVar559._0_4_;
            auVar361._12_4_ = auVar559._0_4_;
            auVar361._16_4_ = auVar559._0_4_;
            auVar361._20_4_ = auVar559._0_4_;
            auVar361._24_4_ = auVar559._0_4_;
            auVar361._28_4_ = auVar559._0_4_;
            auVar361._32_4_ = auVar559._0_4_;
            auVar361._36_4_ = auVar559._0_4_;
            auVar361._40_4_ = auVar559._0_4_;
            auVar361._44_4_ = auVar559._0_4_;
            auVar361._48_4_ = auVar559._0_4_;
            auVar361._52_4_ = auVar559._0_4_;
            auVar361._56_4_ = auVar559._0_4_;
            auVar361._60_4_ = auVar559._0_4_;
            auVar730 = vminps_avx512f(*(undefined1 (*) [64])ptr,auVar361);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar424 = uVar424 - 1;
          } while (uVar424 != 0);
        }
        if (iVar421 == 8) {
          uVar424 = 0;
          if (1 < (int)uVar422) {
            iVar423 = 1;
            do {
              auVar559._0_4_ = *ptr1;
              auVar917._0_4_ = ptr1[1];
              auVar977._4_4_ = auVar917._0_4_;
              auVar977._0_4_ = auVar917._0_4_;
              auVar977._8_4_ = auVar917._0_4_;
              auVar977._12_4_ = auVar917._0_4_;
              auVar977._16_4_ = auVar917._0_4_;
              auVar977._20_4_ = auVar917._0_4_;
              auVar977._24_4_ = auVar917._0_4_;
              auVar977._28_4_ = auVar917._0_4_;
              auVar730 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                       CONCAT424(auVar559._0_4_,
                                                                 CONCAT420(auVar559._0_4_,
                                                                           CONCAT416(auVar559._0_4_,
                                                                                     CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar977,1);
              auVar730 = vminps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
              *(undefined1 (*) [64])outptr = auVar730;
              ptr = (float *)((long)ptr + 0x40);
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar423 = iVar423 + 2;
            } while (iVar423 < (int)uVar422);
            uVar424 = uVar422 & 0x7ffffffe;
          }
          iVar423 = uVar422 - uVar424;
          if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
            do {
              auVar559._0_4_ = *ptr1;
              auVar316._4_4_ = auVar559._0_4_;
              auVar316._0_4_ = auVar559._0_4_;
              auVar316._8_4_ = auVar559._0_4_;
              auVar316._12_4_ = auVar559._0_4_;
              auVar316._16_4_ = auVar559._0_4_;
              auVar316._20_4_ = auVar559._0_4_;
              auVar316._24_4_ = auVar559._0_4_;
              auVar316._28_4_ = auVar559._0_4_;
              auVar671 = vminps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar316);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar423 = iVar423 + -1;
            } while (iVar423 != 0);
          }
        }
        if (iVar421 != 4) {
          return;
        }
        uVar424 = 0;
        if (3 < (int)uVar422) {
          iVar421 = 3;
          do {
            auVar559._0_4_ = ptr1[2];
            auVar903._4_4_ = auVar559._0_4_;
            auVar903._0_4_ = auVar559._0_4_;
            auVar903._8_4_ = auVar559._0_4_;
            auVar903._12_4_ = auVar559._0_4_;
            auVar559._0_4_ = ptr1[3];
            auVar903._20_4_ = auVar559._0_4_;
            auVar903._16_4_ = auVar559._0_4_;
            auVar903._24_4_ = auVar559._0_4_;
            auVar903._28_4_ = auVar559._0_4_;
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar730 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                                CONCAT48(auVar917._0_4_,
                                                                         CONCAT44(auVar917._0_4_,
                                                                                  auVar917._0_4_))),
                                                      CONCAT412(auVar559._0_4_,
                                                                CONCAT48(auVar559._0_4_,
                                                                         CONCAT44(auVar559._0_4_,
                                                                                  auVar559._0_4_))))
                                          ),auVar903,1);
            auVar730 = vminps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 4;
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 4;
          } while (iVar421 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffc;
        }
        uVar872 = uVar424 | 1;
        while ((int)uVar872 < (int)uVar422) {
          auVar559._0_4_ = *ptr1;
          auVar904._4_4_ = auVar559._0_4_;
          auVar904._0_4_ = auVar559._0_4_;
          auVar904._8_4_ = auVar559._0_4_;
          auVar904._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[1];
          auVar904._20_4_ = auVar559._0_4_;
          auVar904._16_4_ = auVar559._0_4_;
          auVar904._24_4_ = auVar559._0_4_;
          auVar904._28_4_ = auVar559._0_4_;
          auVar671 = vminps_avx(auVar904,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar872 = uVar424 + 3;
          uVar424 = uVar424 + 2;
        }
        iVar421 = uVar422 - uVar424;
        if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar425 = 0;
        do {
          uVar880 = *(undefined4 *)((long)ptr1 + lVar425);
          auVar159._4_4_ = uVar880;
          auVar159._0_4_ = uVar880;
          auVar159._8_4_ = uVar880;
          auVar159._12_4_ = uVar880;
          auVar462 = vminps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4)
                                     ,auVar159);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462;
          lVar425 = lVar425 + 4;
          iVar421 = iVar421 + -1;
        } while (iVar421 != 0);
        return;
      }
      if (bw == 1) {
        auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        if ((int)uVar424 < 0x10) {
          uVar422 = 0;
        }
        else {
          iVar421 = 0xf;
          do {
            auVar712 = vminps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 0x10;
          } while (iVar421 < (int)uVar424);
          uVar422 = uVar424 & 0x7ffffff0;
          auVar730 = ZEXT464((uint)*ptr1);
        }
        auVar916._0_4_ = auVar730._0_4_;
        if ((int)(uVar422 | 7) < (int)uVar424) {
          auVar916._4_4_ = auVar916._0_4_;
          auVar916._8_4_ = auVar916._0_4_;
          auVar916._12_4_ = auVar916._0_4_;
          auVar916._16_4_ = auVar916._0_4_;
          auVar916._20_4_ = auVar916._0_4_;
          auVar916._24_4_ = auVar916._0_4_;
          auVar916._28_4_ = auVar916._0_4_;
          uVar872 = uVar422;
          do {
            auVar671 = vminps_avx(auVar916,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar422 = uVar872 + 8;
            iVar421 = uVar872 + 0xf;
            uVar872 = uVar422;
          } while (iVar421 < (int)uVar424);
          auVar916._0_4_ = *ptr1;
        }
        if ((int)uVar424 <= (int)(uVar422 | 3)) {
          return;
        }
        auVar890._4_4_ = auVar916._0_4_;
        auVar890._0_4_ = auVar916._0_4_;
        auVar890._8_4_ = auVar916._0_4_;
        auVar890._12_4_ = auVar916._0_4_;
        lVar425 = 0;
        do {
          auVar462 = vminps_avx(auVar890,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar425 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462;
          lVar425 = lVar425 + 4;
        } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar421 == 0x10) {
        auVar730 = *(undefined1 (*) [64])ptr;
        uVar424 = uVar422;
        do {
          auVar559._0_4_ = *ptr1;
          auVar362._4_4_ = auVar559._0_4_;
          auVar362._0_4_ = auVar559._0_4_;
          auVar362._8_4_ = auVar559._0_4_;
          auVar362._12_4_ = auVar559._0_4_;
          auVar362._16_4_ = auVar559._0_4_;
          auVar362._20_4_ = auVar559._0_4_;
          auVar362._24_4_ = auVar559._0_4_;
          auVar362._28_4_ = auVar559._0_4_;
          auVar362._32_4_ = auVar559._0_4_;
          auVar362._36_4_ = auVar559._0_4_;
          auVar362._40_4_ = auVar559._0_4_;
          auVar362._44_4_ = auVar559._0_4_;
          auVar362._48_4_ = auVar559._0_4_;
          auVar362._52_4_ = auVar559._0_4_;
          auVar362._56_4_ = auVar559._0_4_;
          auVar362._60_4_ = auVar559._0_4_;
          auVar712 = vminps_avx512f(auVar730,auVar362);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
        } while (uVar424 != 0);
      }
      if (iVar421 == 8) {
        auVar730 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        uVar424 = 0;
        if (1 < (int)uVar422) {
          iVar423 = 1;
          do {
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar1062._4_4_ = auVar917._0_4_;
            auVar1062._0_4_ = auVar917._0_4_;
            auVar1062._8_4_ = auVar917._0_4_;
            auVar1062._12_4_ = auVar917._0_4_;
            auVar1062._16_4_ = auVar917._0_4_;
            auVar1062._20_4_ = auVar917._0_4_;
            auVar1062._24_4_ = auVar917._0_4_;
            auVar1062._28_4_ = auVar917._0_4_;
            auVar712 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                     CONCAT424(auVar559._0_4_,
                                                               CONCAT420(auVar559._0_4_,
                                                                         CONCAT416(auVar559._0_4_,
                                                                                   CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar1062,1);
            auVar712 = vminps_avx512f(auVar730,auVar712);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          do {
            auVar559._0_4_ = *ptr1;
            auVar317._4_4_ = auVar559._0_4_;
            auVar317._0_4_ = auVar559._0_4_;
            auVar317._8_4_ = auVar559._0_4_;
            auVar317._12_4_ = auVar559._0_4_;
            auVar317._16_4_ = auVar559._0_4_;
            auVar317._20_4_ = auVar559._0_4_;
            auVar317._24_4_ = auVar559._0_4_;
            auVar317._28_4_ = auVar559._0_4_;
            auVar671 = vminps_avx512vl(auVar730._0_32_,auVar317);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      if (iVar421 != 4) {
        return;
      }
      auVar730 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      uVar424 = 0;
      if (3 < (int)uVar422) {
        iVar421 = 3;
        do {
          auVar559._0_4_ = ptr1[2];
          auVar996._4_4_ = auVar559._0_4_;
          auVar996._0_4_ = auVar559._0_4_;
          auVar996._8_4_ = auVar559._0_4_;
          auVar996._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[3];
          auVar996._20_4_ = auVar559._0_4_;
          auVar996._16_4_ = auVar559._0_4_;
          auVar996._24_4_ = auVar559._0_4_;
          auVar996._28_4_ = auVar559._0_4_;
          auVar559._0_4_ = *ptr1;
          auVar917._0_4_ = ptr1[1];
          auVar712 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                              CONCAT48(auVar917._0_4_,
                                                                       CONCAT44(auVar917._0_4_,
                                                                                auVar917._0_4_))),
                                                    CONCAT412(auVar559._0_4_,
                                                              CONCAT48(auVar559._0_4_,
                                                                       CONCAT44(auVar559._0_4_,
                                                                                auVar559._0_4_))))),
                                auVar996,1);
          auVar712 = vminps_avx512f(auVar730,auVar712);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      auVar462 = auVar730._0_16_;
      if ((int)(uVar424 | 1) < (int)uVar422) {
        auVar997._16_16_ = auVar462;
        auVar997._0_16_ = auVar462;
        uVar872 = uVar424;
        do {
          auVar559._0_4_ = *ptr1;
          auVar1063._4_4_ = auVar559._0_4_;
          auVar1063._0_4_ = auVar559._0_4_;
          auVar1063._8_4_ = auVar559._0_4_;
          auVar1063._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[1];
          auVar1063._20_4_ = auVar559._0_4_;
          auVar1063._16_4_ = auVar559._0_4_;
          auVar1063._24_4_ = auVar559._0_4_;
          auVar1063._28_4_ = auVar559._0_4_;
          auVar671 = vminps_avx(auVar997,auVar1063);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar424 = uVar872 + 2;
          iVar421 = uVar872 + 3;
          uVar872 = uVar424;
        } while (iVar421 < (int)uVar422);
      }
      if ((int)uVar422 <= (int)uVar424) {
        return;
      }
      lVar425 = 0;
      do {
        auVar559._0_4_ = ptr1[lVar425];
        auVar160._4_4_ = auVar559._0_4_;
        auVar160._0_4_ = auVar559._0_4_;
        auVar160._8_4_ = auVar559._0_4_;
        auVar160._12_4_ = auVar559._0_4_;
        auVar492 = vminps_avx512vl(auVar462,auVar160);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar492;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        lVar425 = lVar425 + 1;
      } while (uVar422 - uVar424 != (int)lVar425);
      return;
    }
    if (aw == bw) {
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar730 = vminps_avx512f(*(undefined1 (*) [64])ptr,*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [64])outptr = auVar730;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar671 = vminps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                              *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar462 = vminps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,
                              *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        auVar462 = vminss_avx(ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4)),
                              ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr + lVar425 * 4)));
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003a2797;
      auVar559._0_4_ = *ptr;
      if (iVar421 == 4) {
        auVar946 = *(undefined1 (*) [16])ptr;
        auVar730 = ZEXT3264(CONCAT1616(auVar946,auVar946));
      }
      else {
        auVar946._4_4_ = auVar559._0_4_;
        auVar946._0_4_ = auVar559._0_4_;
        auVar946._8_4_ = auVar559._0_4_;
        auVar946._12_4_ = auVar559._0_4_;
        if (iVar421 == 8) {
          auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar1082._4_4_ = auVar559._0_4_;
          auVar1082._0_4_ = auVar559._0_4_;
          auVar1082._8_4_ = auVar559._0_4_;
          auVar1082._12_4_ = auVar559._0_4_;
          auVar1082._16_4_ = auVar559._0_4_;
          auVar1082._20_4_ = auVar559._0_4_;
          auVar1082._24_4_ = auVar559._0_4_;
          auVar1082._28_4_ = auVar559._0_4_;
          auVar730 = ZEXT3264(auVar1082);
          if (iVar421 == 0x10) {
            auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_003acaa1;
          }
        }
      }
      auVar1082 = auVar730._0_32_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar1082,1);
LAB_003acaa1:
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar712 = vminps_avx512f(auVar730,*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar671 = vminps_avx(auVar1082,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar462 = vminps_avx(auVar946,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        auVar462 = vminss_avx(ZEXT416((uint)auVar559._0_4_),
                              ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4)));
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    auVar559._0_4_ = *ptr1;
    if (iVar421 == 4) {
      auVar931 = *(undefined1 (*) [16])ptr1;
      auVar730 = ZEXT3264(CONCAT1616(auVar931,auVar931));
    }
    else {
      auVar931._4_4_ = auVar559._0_4_;
      auVar931._0_4_ = auVar559._0_4_;
      auVar931._8_4_ = auVar559._0_4_;
      auVar931._12_4_ = auVar559._0_4_;
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar1073._4_4_ = auVar559._0_4_;
        auVar1073._0_4_ = auVar559._0_4_;
        auVar1073._8_4_ = auVar559._0_4_;
        auVar1073._12_4_ = auVar559._0_4_;
        auVar1073._16_4_ = auVar559._0_4_;
        auVar1073._20_4_ = auVar559._0_4_;
        auVar1073._24_4_ = auVar559._0_4_;
        auVar1073._28_4_ = auVar559._0_4_;
        auVar730 = ZEXT3264(auVar1073);
        if (iVar421 == 0x10) {
          auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_003aaa82;
        }
      }
    }
    auVar1073 = auVar730._0_32_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar1073,1);
LAB_003aaa82:
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      iVar421 = 0xf;
      do {
        auVar712 = vminps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])outptr = auVar712;
        ptr = (float *)((long)ptr + 0x40);
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
    }
    uVar872 = uVar422 | 7;
    while ((int)uVar872 < (int)uVar424) {
      auVar671 = vminps_avx(auVar1073,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
      *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      uVar872 = uVar422 + 0xf;
      uVar422 = uVar422 + 8;
    }
    uVar872 = uVar422 | 3;
    while ((int)uVar872 < (int)uVar424) {
      auVar462 = vminps_avx(auVar931,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      uVar872 = uVar422 + 7;
      uVar422 = uVar422 + 4;
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      ::_ps512_1[0] = ::_ps512_1[0];
      ::_ps512_1[1] = ::_ps512_1[1];
      ::_ps512_1[2] = ::_ps512_1[2];
      ::_ps512_1[3] = ::_ps512_1[3];
      ::_ps512_1[4] = ::_ps512_1[4];
      ::_ps512_1[5] = ::_ps512_1[5];
      ::_ps512_1[6] = ::_ps512_1[6];
      ::_ps512_1[7] = ::_ps512_1[7];
      ::_ps512_1[8] = ::_ps512_1[8];
      ::_ps512_1[9] = ::_ps512_1[9];
      ::_ps512_1[10] = ::_ps512_1[10];
      ::_ps512_1[0xb] = ::_ps512_1[0xb];
      ::_ps512_1[0xc] = ::_ps512_1[0xc];
      ::_ps512_1[0xd] = ::_ps512_1[0xd];
      ::_ps512_1[0xe] = ::_ps512_1[0xe];
      ::_ps512_1[0xf] = ::_ps512_1[0xf];
      ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
      ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
      ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
      ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
      ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
      ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
      ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
      ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
      ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
      ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
      ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
      ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
      ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
      ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
      ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
      ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
      ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
      ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
      ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
      ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
      ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
      ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
      ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
      ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
      ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
      ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
      ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
      ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
      ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
      ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
      ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
      ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
      ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
      ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
      ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
      ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
      ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
      ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
      ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
      ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
      ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
      ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
      ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
      ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
      ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
      ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
      ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
      ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
      ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
      ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
      ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
      ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
      ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
      ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
      ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
      ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
      ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
      ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
      ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
      ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
      ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
      ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
      ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
      ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
      ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
      ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
      ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
      ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
      ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
      ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
      ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
      ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
      ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
      ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
      ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
      ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
      ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
      ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
      ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
      ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
      ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
      ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
      ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
      ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
      ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
      ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
      ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
      ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
      ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
      ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
      ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
      ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
      ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
      ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
      ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
      ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
      ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
      ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
      ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
      ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
      ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
      ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
      ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
      ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
      ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
      ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
      ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
      ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
      ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
      ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
      ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
      ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
      ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
      ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
      ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
      ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
      ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
      ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
      ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
      ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
      ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
      ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
      ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
      ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
      ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
      ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
      ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
      ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
      ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
      ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
      ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
      ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
      ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
      ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
      ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
      ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
      ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
      ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
      ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
      ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
      ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
      ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
      ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
      ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
      ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
      ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
      ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
      ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
      ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
      ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
      ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
      ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
      ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
      ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
      ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
      ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
      ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
      ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
      ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
      ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
      _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
      _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
      _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
      _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
      _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
      _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
      _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
      _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
      _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
      _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
      _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
      _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
      _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
      _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
      _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
      _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
      _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
      _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
      _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
      _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
      _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
      _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
      _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
      _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
      _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
      _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
      _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
      _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
      _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
      _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
      _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
      _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
      _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
      _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
      _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
      _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
      _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
      _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
      _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
      _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
      _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
      _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
      _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
      _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
      _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
      _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
      _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
      _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
      _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
      _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
      _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
      _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
      _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
      _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
      _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
      _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
      _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
      _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
      _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
      _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
      _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
      _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
      _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
      _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
      _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
      _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
      _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
      _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
      _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
      _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
      _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
      _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
      _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
      _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
      _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
      _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
      _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
      _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
      _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
      _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
      _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
      _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
      _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
      _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
      _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
      _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
      _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
      _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
      _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
      _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
      _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
      _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
      _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
      _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
      _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
      _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
      _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
      _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
      _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
      _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
      _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
      _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
      _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
      _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
      _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
      _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
      _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
      _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
      _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
      _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
      _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
      _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
      _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
      _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
      _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
      _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
      _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
      _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
      _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
      _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
      _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
      _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
      _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
      _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
      _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
      _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
      _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
      _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
      _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
      _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
      _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
      _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
      _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
      _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
      _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
      _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
      _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
      _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
      _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
      _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
      _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
      _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
      _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
      _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
      _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
      _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
      _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
      _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
      _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
      _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
      _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
      _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
      _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
      _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
      _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
      _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
      _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
      _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
      _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
      _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
      _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
      _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
      _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
      _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
      _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
      _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
      _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
      _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
      _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
      _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
      _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
      _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
      _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
      _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
      _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
      _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
      _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
      _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
      _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
      _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
      _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
      _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
      _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
      _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
      _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
      _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
      _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
      _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
      _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
      _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
      _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
      _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
      _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
      _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
      _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
      _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
      _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
      _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
      _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
      _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
      _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
      _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
      _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
      _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
      _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
      _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
      _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
      _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
      _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
      _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
      _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
      _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
      _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
      _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
      _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
      _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
      _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
      _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
      _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
      _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
      _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
      _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
      _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
      _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
      return;
    }
    lVar425 = 0;
    do {
      auVar462 = vminss_avx(ZEXT416((uint)auVar559._0_4_),
                            ZEXT416(*(uint *)(*(undefined1 (*) [64])ptr + lVar425 * 4)));
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462._0_4_;
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  case 6:
    uVar422 = bw;
    if (bw < aw) {
      uVar422 = aw;
    }
    iVar421 = bp;
    if (bp < ap) {
      iVar421 = ap;
    }
    uVar424 = iVar421 * uVar422;
    if (ap != bp) {
LAB_003a2bfb:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (0 < (int)uVar422 && iVar421 == 0x10) {
          auVar730 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar712 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar713 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar714 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar715 = vpxord_avx512f(auVar730,auVar713);
          auVar716 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar717 = vpxord_avx512f(auVar716,auVar713);
          auVar713 = vpxord_avx512f(auVar714,auVar713);
          auVar504 = vxorps_avx512vl(auVar504,auVar504);
          in_ZMM29 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          uVar424 = uVar422;
          do {
            auVar718 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,
                                      (undefined1  [64])_ps512_min_norm_pos);
            auVar719 = vpsrld_avx512f(auVar718,0x17);
            auVar718 = vpternlogd_avx512f(auVar718,auVar730,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar46 = vcmpps_avx512f(auVar718,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar720 = vsubps_avx512f(auVar718,(undefined1  [64])afVar404);
            auVar718 = vaddps_avx512f(auVar720,auVar718);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar774._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar720._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar774._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar720._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar774._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar720._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar774._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar720._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar774._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar720._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar774._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar720._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar774._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar720._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar774._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar720._28_4_;
            bVar28 = (byte)(uVar46 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar774._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar720._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar774._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar720._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar774._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar720._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar774._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar720._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar774._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar720._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar774._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar720._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar774._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar720._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar774._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar720._60_4_;
            auVar718 = vfmadd132ps_avx512f(auVar774,(undefined1  [64])afVar413,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar774,(undefined1  [64])afVar414);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar774,(undefined1  [64])afVar415);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar774,(undefined1  [64])afVar416);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar774,(undefined1  [64])afVar417);
            auVar720 = vmulps_avx512f(auVar774,auVar774);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar774,(undefined1  [64])afVar418);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar774,(undefined1  [64])afVar419);
            auVar721 = vmulps_avx512f(auVar720,auVar774);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar774,(undefined1  [64])afVar420);
            auVar718 = vfmadd213ps_avx512f(auVar721,auVar718,auVar774);
            auVar719 = vpsubd_avx512f(auVar719,auVar712);
            auVar719 = vcvtdq2ps_avx512f(auVar719);
            auVar721 = vaddps_avx512f(auVar719,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar775._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar721._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar775._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar721._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar775._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar721._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar775._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar721._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar775._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar721._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar775._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar721._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar775._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar721._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar775._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar721._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar775._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar721._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar775._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar721._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar775._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar721._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar775._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar721._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar775._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar721._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar775._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar721._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar775._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar721._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar775._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar721._60_4_;
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar775,auVar714);
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar715,auVar720);
            uVar46 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar504),2);
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar716,auVar775);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar776._0_4_ = (uint)bVar11 * in_ZMM29._0_4_ | (uint)!bVar11 * auVar718._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar776._4_4_ = (uint)bVar11 * in_ZMM29._4_4_ | (uint)!bVar11 * auVar718._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar776._8_4_ = (uint)bVar11 * in_ZMM29._8_4_ | (uint)!bVar11 * auVar718._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar776._12_4_ = (uint)bVar11 * in_ZMM29._12_4_ | (uint)!bVar11 * auVar718._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar776._16_4_ = (uint)bVar11 * in_ZMM29._16_4_ | (uint)!bVar11 * auVar718._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar776._20_4_ = (uint)bVar11 * in_ZMM29._20_4_ | (uint)!bVar11 * auVar718._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar776._24_4_ = (uint)bVar11 * in_ZMM29._24_4_ | (uint)!bVar11 * auVar718._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar776._28_4_ = (uint)bVar11 * in_ZMM29._28_4_ | (uint)!bVar11 * auVar718._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar776._32_4_ = (uint)bVar11 * in_ZMM29._32_4_ | (uint)!bVar11 * auVar718._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar776._36_4_ = (uint)bVar11 * in_ZMM29._36_4_ | (uint)!bVar11 * auVar718._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar776._40_4_ = (uint)bVar11 * in_ZMM29._40_4_ | (uint)!bVar11 * auVar718._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar776._44_4_ = (uint)bVar11 * in_ZMM29._44_4_ | (uint)!bVar11 * auVar718._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar776._48_4_ = (uint)bVar11 * in_ZMM29._48_4_ | (uint)!bVar11 * auVar718._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar776._52_4_ = (uint)bVar11 * in_ZMM29._52_4_ | (uint)!bVar11 * auVar718._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar776._56_4_ = (uint)bVar11 * in_ZMM29._56_4_ | (uint)!bVar11 * auVar718._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar776._60_4_ = (uint)bVar11 * in_ZMM29._60_4_ | (uint)!bVar11 * auVar718._60_4_;
            auVar559._0_4_ = *ptr1;
            auVar359._4_4_ = auVar559._0_4_;
            auVar359._0_4_ = auVar559._0_4_;
            auVar359._8_4_ = auVar559._0_4_;
            auVar359._12_4_ = auVar559._0_4_;
            auVar359._16_4_ = auVar559._0_4_;
            auVar359._20_4_ = auVar559._0_4_;
            auVar359._24_4_ = auVar559._0_4_;
            auVar359._28_4_ = auVar559._0_4_;
            auVar359._32_4_ = auVar559._0_4_;
            auVar359._36_4_ = auVar559._0_4_;
            auVar359._40_4_ = auVar559._0_4_;
            auVar359._44_4_ = auVar559._0_4_;
            auVar359._48_4_ = auVar559._0_4_;
            auVar359._52_4_ = auVar559._0_4_;
            auVar359._56_4_ = auVar559._0_4_;
            auVar359._60_4_ = auVar559._0_4_;
            auVar718 = vmulps_avx512f(auVar776,auVar359);
            auVar718 = vminps_avx512f(auVar718,(undefined1  [64])afVar405);
            auVar718 = vmaxps_avx512f(auVar718,(undefined1  [64])afVar406);
            auVar719 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar718,auVar730);
            auVar720 = vrndscaleps_avx512f(auVar719,1);
            uVar46 = vcmpps_avx512f(auVar719,auVar720,1);
            auVar719 = vsubps_avx512f(auVar720,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar777._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar720._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar777._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar720._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar777._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar720._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar777._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar720._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar777._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar720._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar777._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar720._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar777._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar720._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar777._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar720._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar777._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar720._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar777._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar720._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar777._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar720._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar777._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar720._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar777._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar720._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar777._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar720._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar777._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar720._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar777._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar720._60_4_;
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar777,auVar717);
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar777,auVar713);
            auVar719 = vfmadd213ps_avx512f(auVar718,(undefined1  [64])afVar408,
                                           (undefined1  [64])afVar409);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar410);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar411);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar412);
            auVar720 = vmulps_avx512f(auVar718,auVar718);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,auVar730);
            auVar718 = vfmadd213ps_avx512f(auVar719,auVar720,auVar718);
            auVar719 = vcvttps2dq_avx512f(auVar777);
            auVar718 = vaddps_avx512f(auVar718,(undefined1  [64])afVar404);
            auVar719 = vpaddd_avx512f(auVar719,auVar712);
            auVar719 = vpslld_avx512f(auVar719,0x17);
            auVar718 = vmulps_avx512f(auVar718,auVar719);
            *(undefined1 (*) [64])outptr = auVar718;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar424 = uVar424 - 1;
            auVar462 = auVar493;
            auVar671 = auVar675;
          } while (uVar424 != 0);
        }
        afVar420 = _ps512_cephes_log_p8;
        afVar419 = _ps512_cephes_log_p7;
        afVar418 = _ps512_cephes_log_p6;
        afVar417 = _ps512_cephes_log_p5;
        afVar416 = _ps512_cephes_log_p4;
        afVar415 = _ps512_cephes_log_p3;
        afVar414 = _ps512_cephes_log_p2;
        afVar413 = _ps512_cephes_log_p1;
        afVar412 = ::_ps512_cephes_exp_p4;
        afVar411 = ::_ps512_cephes_exp_p3;
        afVar410 = ::_ps512_cephes_exp_p2;
        afVar409 = ::_ps512_cephes_exp_p1;
        afVar408 = ::_ps512_cephes_exp_p0;
        afVar407 = ::_ps512_cephes_LOG2EF;
        afVar406 = ::_ps512_exp_lo;
        afVar405 = ::_ps512_exp_hi;
        afVar404 = ::_ps512_1;
        if (iVar421 == 8) {
          uVar424 = 0;
          if (1 < (int)uVar422) {
            auVar671 = ::_ps512_1._0_32_;
            auVar730 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
            auVar712 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
            auVar713 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar714 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
            auVar715 = vpxord_avx512f(auVar730,auVar713);
            auVar716 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
            auVar462 = ::_ps512_exp_lo._0_16_;
            auVar717 = vpxord_avx512f(auVar716,auVar713);
            auVar713 = vpxord_avx512f(auVar714,auVar713);
            iVar423 = 1;
            auVar504 = vxorps_avx512vl(auVar504,auVar504);
            in_ZMM29 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
            do {
              auVar718 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,
                                        (undefined1  [64])_ps512_min_norm_pos);
              auVar719 = vpsrld_avx512f(auVar718,0x17);
              auVar718 = vpternlogd_avx512f(auVar718,auVar730,(undefined1  [64])_ps512_inv_mant_mask
                                            ,0xec);
              uVar46 = vcmpps_avx512f(auVar718,(undefined1  [64])_ps512_cephes_SQRTHF,1);
              auVar720 = vsubps_avx512f(auVar718,(undefined1  [64])afVar404);
              auVar718 = vaddps_avx512f(auVar720,auVar718);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar778._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar720._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar778._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar720._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar778._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar720._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar778._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar720._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar778._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar720._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar778._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar720._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar778._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar720._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              auVar778._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar720._28_4_;
              bVar28 = (byte)(uVar46 >> 8);
              bVar11 = (bool)(bVar28 & 1);
              auVar778._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar720._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              auVar778._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar720._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              auVar778._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar720._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              auVar778._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar720._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              auVar778._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar720._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              auVar778._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar720._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              auVar778._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar720._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              auVar778._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar720._60_4_;
              auVar718 = vfmadd132ps_avx512f(auVar778,(undefined1  [64])afVar413,
                                             (undefined1  [64])_ps512_cephes_log_p0);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar778,(undefined1  [64])afVar414);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar778,(undefined1  [64])afVar415);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar778,(undefined1  [64])afVar416);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar778,(undefined1  [64])afVar417);
              auVar720 = vmulps_avx512f(auVar778,auVar778);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar778,(undefined1  [64])afVar418);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar778,(undefined1  [64])afVar419);
              auVar721 = vmulps_avx512f(auVar720,auVar778);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar778,(undefined1  [64])afVar420);
              auVar718 = vfmadd213ps_avx512f(auVar721,auVar718,auVar778);
              auVar559._0_4_ = *ptr1;
              uVar426 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar504),2);
              auVar672 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
              auVar719 = vpsubd_avx512f(auVar719,auVar712);
              auVar721 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                       CONCAT424(auVar559._0_4_,
                                                                 CONCAT420(auVar559._0_4_,
                                                                           CONCAT416(auVar559._0_4_,
                                                                                     CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar672,1);
              auVar719 = vcvtdq2ps_avx512f(auVar719);
              auVar722 = vaddps_avx512f(auVar719,(undefined1  [64])afVar404);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar779._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar722._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar779._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar722._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar779._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar722._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar779._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar722._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar779._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar722._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar779._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar722._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar779._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar722._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              auVar779._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar722._28_4_;
              bVar11 = (bool)(bVar28 & 1);
              auVar779._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar722._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              auVar779._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar722._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              auVar779._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar722._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              auVar779._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar722._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              auVar779._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar722._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              auVar779._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar722._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              auVar779._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar722._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              auVar779._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar722._60_4_;
              auVar718 = vfmadd231ps_avx512f(auVar718,auVar779,auVar714);
              auVar718 = vfmadd231ps_avx512f(auVar718,auVar715,auVar720);
              auVar718 = vfmadd231ps_avx512f(auVar718,auVar716,auVar779);
              bVar11 = (bool)((byte)uVar426 & 1);
              auVar780._0_4_ = (uint)bVar11 * in_ZMM29._0_4_ | (uint)!bVar11 * auVar718._0_4_;
              bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
              auVar780._4_4_ = (uint)bVar11 * in_ZMM29._4_4_ | (uint)!bVar11 * auVar718._4_4_;
              bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
              auVar780._8_4_ = (uint)bVar11 * in_ZMM29._8_4_ | (uint)!bVar11 * auVar718._8_4_;
              bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
              auVar780._12_4_ = (uint)bVar11 * in_ZMM29._12_4_ | (uint)!bVar11 * auVar718._12_4_;
              bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
              auVar780._16_4_ = (uint)bVar11 * in_ZMM29._16_4_ | (uint)!bVar11 * auVar718._16_4_;
              bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
              auVar780._20_4_ = (uint)bVar11 * in_ZMM29._20_4_ | (uint)!bVar11 * auVar718._20_4_;
              bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
              auVar780._24_4_ = (uint)bVar11 * in_ZMM29._24_4_ | (uint)!bVar11 * auVar718._24_4_;
              bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
              auVar780._28_4_ = (uint)bVar11 * in_ZMM29._28_4_ | (uint)!bVar11 * auVar718._28_4_;
              bVar11 = (bool)((byte)(uVar426 >> 8) & 1);
              auVar780._32_4_ = (uint)bVar11 * in_ZMM29._32_4_ | (uint)!bVar11 * auVar718._32_4_;
              bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
              auVar780._36_4_ = (uint)bVar11 * in_ZMM29._36_4_ | (uint)!bVar11 * auVar718._36_4_;
              bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
              auVar780._40_4_ = (uint)bVar11 * in_ZMM29._40_4_ | (uint)!bVar11 * auVar718._40_4_;
              bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
              auVar780._44_4_ = (uint)bVar11 * in_ZMM29._44_4_ | (uint)!bVar11 * auVar718._44_4_;
              bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
              auVar780._48_4_ = (uint)bVar11 * in_ZMM29._48_4_ | (uint)!bVar11 * auVar718._48_4_;
              bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
              auVar780._52_4_ = (uint)bVar11 * in_ZMM29._52_4_ | (uint)!bVar11 * auVar718._52_4_;
              bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
              auVar780._56_4_ = (uint)bVar11 * in_ZMM29._56_4_ | (uint)!bVar11 * auVar718._56_4_;
              bVar11 = SUB81(uVar426 >> 0xf,0);
              auVar780._60_4_ = (uint)bVar11 * in_ZMM29._60_4_ | (uint)!bVar11 * auVar718._60_4_;
              auVar718 = vmulps_avx512f(auVar780,auVar721);
              auVar718 = vminps_avx512f(auVar718,(undefined1  [64])afVar405);
              auVar718 = vmaxps_avx512f(auVar718,(undefined1  [64])afVar406);
              auVar719 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar718,auVar730);
              auVar720 = vrndscaleps_avx512f(auVar719,1);
              uVar46 = vcmpps_avx512f(auVar719,auVar720,1);
              auVar719 = vsubps_avx512f(auVar720,(undefined1  [64])afVar404);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar781._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar720._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar781._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar720._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar781._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar720._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar781._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar720._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar781._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar720._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar781._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar720._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar781._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar720._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              auVar781._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar720._28_4_;
              bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
              auVar781._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar720._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              auVar781._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar720._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              auVar781._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar720._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              auVar781._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar720._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              auVar781._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar720._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              auVar781._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar720._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              auVar781._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar720._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              auVar781._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar720._60_4_;
              auVar718 = vfmadd231ps_avx512f(auVar718,auVar781,auVar717);
              auVar718 = vfmadd231ps_avx512f(auVar718,auVar781,auVar713);
              auVar719 = vfmadd213ps_avx512f(auVar718,(undefined1  [64])afVar408,
                                             (undefined1  [64])afVar409);
              auVar720 = vmulps_avx512f(auVar718,auVar718);
              auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar410);
              auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar411);
              auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar412);
              auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,auVar730);
              auVar718 = vfmadd213ps_avx512f(auVar719,auVar720,auVar718);
              auVar718 = vaddps_avx512f(auVar718,(undefined1  [64])afVar404);
              auVar719 = vcvttps2dq_avx512f(auVar781);
              auVar719 = vpaddd_avx512f(auVar719,auVar712);
              auVar719 = vpslld_avx512f(auVar719,0x17);
              auVar718 = vmulps_avx512f(auVar718,auVar719);
              *(undefined1 (*) [64])outptr = auVar718;
              ptr = (float *)((long)ptr + 0x40);
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar423 = iVar423 + 2;
            } while (iVar423 < (int)uVar422);
            uVar424 = uVar422 & 0x7ffffffe;
          }
          iVar423 = uVar422 - uVar424;
          if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
            auVar1119._8_4_ = 0xffffff82;
            auVar1119._0_8_ = 0xffffff82ffffff82;
            auVar1119._12_4_ = 0xffffff82;
            auVar1119._16_4_ = 0xffffff82;
            auVar1119._20_4_ = 0xffffff82;
            auVar1119._24_4_ = 0xffffff82;
            auVar1119._28_4_ = 0xffffff82;
            auVar1179._8_4_ = 0x3f3504f3;
            auVar1179._0_8_ = 0x3f3504f33f3504f3;
            auVar1179._12_4_ = 0x3f3504f3;
            auVar1179._16_4_ = 0x3f3504f3;
            auVar1179._20_4_ = 0x3f3504f3;
            auVar1179._24_4_ = 0x3f3504f3;
            auVar1179._28_4_ = 0x3f3504f3;
            auVar1235._8_4_ = 0xbf800000;
            auVar1235._0_8_ = 0xbf800000bf800000;
            auVar1235._12_4_ = 0xbf800000;
            auVar1235._16_4_ = 0xbf800000;
            auVar1235._20_4_ = 0xbf800000;
            auVar1235._24_4_ = 0xbf800000;
            auVar1235._28_4_ = 0xbf800000;
            auVar1297._8_4_ = 0x3f800000;
            auVar1297._0_8_ = 0x3f8000003f800000;
            auVar1297._12_4_ = 0x3f800000;
            auVar1297._16_4_ = 0x3f800000;
            auVar1297._20_4_ = 0x3f800000;
            auVar1297._24_4_ = 0x3f800000;
            auVar1297._28_4_ = 0x3f800000;
            auVar1355._8_4_ = 0x3d9021bb;
            auVar1355._0_8_ = 0x3d9021bb3d9021bb;
            auVar1355._12_4_ = 0x3d9021bb;
            auVar1355._16_4_ = 0x3d9021bb;
            auVar1355._20_4_ = 0x3d9021bb;
            auVar1355._24_4_ = 0x3d9021bb;
            auVar1355._28_4_ = 0x3d9021bb;
            auVar1411._8_4_ = 0xbdebd1b8;
            auVar1411._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar1411._12_4_ = 0xbdebd1b8;
            auVar1411._16_4_ = 0xbdebd1b8;
            auVar1411._20_4_ = 0xbdebd1b8;
            auVar1411._24_4_ = 0xbdebd1b8;
            auVar1411._28_4_ = 0xbdebd1b8;
            auVar1465._8_4_ = 0x3def251a;
            auVar1465._0_8_ = 0x3def251a3def251a;
            auVar1465._12_4_ = 0x3def251a;
            auVar1465._16_4_ = 0x3def251a;
            auVar1465._20_4_ = 0x3def251a;
            auVar1465._24_4_ = 0x3def251a;
            auVar1465._28_4_ = 0x3def251a;
            auVar1519._8_4_ = 0xbdfe5d4f;
            auVar1519._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar1519._12_4_ = 0xbdfe5d4f;
            auVar1519._16_4_ = 0xbdfe5d4f;
            auVar1519._20_4_ = 0xbdfe5d4f;
            auVar1519._24_4_ = 0xbdfe5d4f;
            auVar1519._28_4_ = 0xbdfe5d4f;
            auVar1573._8_4_ = 0x3e11e9bf;
            auVar1573._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar1573._12_4_ = 0x3e11e9bf;
            auVar1573._16_4_ = 0x3e11e9bf;
            auVar1573._20_4_ = 0x3e11e9bf;
            auVar1573._24_4_ = 0x3e11e9bf;
            auVar1573._28_4_ = 0x3e11e9bf;
            auVar1627._8_4_ = 0xbe2aae50;
            auVar1627._0_8_ = 0xbe2aae50be2aae50;
            auVar1627._12_4_ = 0xbe2aae50;
            auVar1627._16_4_ = 0xbe2aae50;
            auVar1627._20_4_ = 0xbe2aae50;
            auVar1627._24_4_ = 0xbe2aae50;
            auVar1627._28_4_ = 0xbe2aae50;
            auVar1681._8_4_ = 0x3e4cceac;
            auVar1681._0_8_ = 0x3e4cceac3e4cceac;
            auVar1681._12_4_ = 0x3e4cceac;
            auVar1681._16_4_ = 0x3e4cceac;
            auVar1681._20_4_ = 0x3e4cceac;
            auVar1681._24_4_ = 0x3e4cceac;
            auVar1681._28_4_ = 0x3e4cceac;
            auVar1733._8_4_ = 0xbe7ffffc;
            auVar1733._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar1733._12_4_ = 0xbe7ffffc;
            auVar1733._16_4_ = 0xbe7ffffc;
            auVar1733._20_4_ = 0xbe7ffffc;
            auVar1733._24_4_ = 0xbe7ffffc;
            auVar1733._28_4_ = 0xbe7ffffc;
            auVar1784._8_4_ = 0x3eaaaaaa;
            auVar1784._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar1784._12_4_ = 0x3eaaaaaa;
            auVar1784._16_4_ = 0x3eaaaaaa;
            auVar1784._20_4_ = 0x3eaaaaaa;
            auVar1784._24_4_ = 0x3eaaaaaa;
            auVar1784._28_4_ = 0x3eaaaaaa;
            auVar672 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar684 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar462 = vxorps_avx512vl(auVar462,auVar462);
            auVar671 = vpcmpeqd_avx2(auVar671,auVar671);
            auVar676 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
            auVar677 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
            auVar681 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar682 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
            auVar563 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
            auVar564 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar504 = auVar564._0_16_;
            auVar565 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            in_ZMM29 = ZEXT3264(auVar565);
            do {
              auVar276._8_4_ = 0x800000;
              auVar276._0_8_ = 0x80000000800000;
              auVar276._12_4_ = 0x800000;
              auVar276._16_4_ = 0x800000;
              auVar276._20_4_ = 0x800000;
              auVar276._24_4_ = 0x800000;
              auVar276._28_4_ = 0x800000;
              auVar566 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar276);
              auVar567 = vpsrld_avx512vl(auVar566,0x17);
              auVar978._8_4_ = 0x807fffff;
              auVar978._0_8_ = 0x807fffff807fffff;
              auVar978._12_4_ = 0x807fffff;
              auVar978._16_4_ = 0x807fffff;
              auVar978._20_4_ = 0x807fffff;
              auVar978._24_4_ = 0x807fffff;
              auVar978._28_4_ = 0x807fffff;
              auVar277._8_4_ = 0x3f000000;
              auVar277._0_8_ = 0x3f0000003f000000;
              auVar277._12_4_ = 0x3f000000;
              auVar277._16_4_ = 0x3f000000;
              auVar277._20_4_ = 0x3f000000;
              auVar277._24_4_ = 0x3f000000;
              auVar277._28_4_ = 0x3f000000;
              auVar566 = vpternlogd_avx512vl(auVar566,auVar978,auVar277,0xea);
              uVar46 = vcmpps_avx512vl(auVar566,auVar1179,1);
              auVar559 = vaddps_avx512vl(auVar566,auVar1235);
              auVar566 = vaddps_avx512vl(auVar559,auVar566);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar602._0_4_ = (uint)bVar11 * auVar566._0_4_ | (uint)!bVar11 * auVar559._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar602._4_4_ = (uint)bVar11 * auVar566._4_4_ | (uint)!bVar11 * auVar559._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar602._8_4_ = (uint)bVar11 * auVar566._8_4_ | (uint)!bVar11 * auVar559._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar602._12_4_ = (uint)bVar11 * auVar566._12_4_ | (uint)!bVar11 * auVar559._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar602._16_4_ = (uint)bVar11 * auVar566._16_4_ | (uint)!bVar11 * auVar559._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar602._20_4_ = (uint)bVar11 * auVar566._20_4_ | (uint)!bVar11 * auVar559._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar602._24_4_ = (uint)bVar11 * auVar566._24_4_ | (uint)!bVar11 * auVar559._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar602._28_4_ = (uint)bVar11 * auVar566._28_4_ | (uint)!bVar11 * auVar559._28_4_;
              auVar566 = vfmadd213ps_avx512vl(auVar1355,auVar602,auVar1411);
              auVar566 = vfmadd213ps_avx512vl(auVar566,auVar602,auVar1465);
              auVar566 = vfmadd213ps_avx512vl(auVar566,auVar602,auVar1519);
              uVar426 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                        ZEXT1632(auVar462),2);
              auVar566 = vfmadd213ps_avx512vl(auVar566,auVar602,auVar1573);
              auVar566 = vfmadd213ps_avx512vl(auVar566,auVar602,auVar1627);
              auVar566 = vfmadd213ps_avx512vl(auVar566,auVar602,auVar1681);
              auVar559 = vmulps_avx512vl(auVar602,auVar602);
              auVar566 = vfmadd213ps_avx512vl(auVar566,auVar602,auVar1733);
              auVar566 = vfmadd213ps_avx512vl(auVar566,auVar602,auVar1784);
              auVar560 = vmulps_avx512vl(auVar559,auVar602);
              auVar566 = vmulps_avx512vl(auVar560,auVar566);
              auVar567 = vpaddd_avx512vl(auVar567,auVar1119);
              auVar567 = vcvtdq2ps_avx512vl(auVar567);
              auVar560 = vsubps_avx512vl(auVar567,auVar1297);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar603._0_4_ = (uint)bVar11 * auVar560._0_4_ | (uint)!bVar11 * auVar567._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar603._4_4_ = (uint)bVar11 * auVar560._4_4_ | (uint)!bVar11 * auVar567._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar603._8_4_ = (uint)bVar11 * auVar560._8_4_ | (uint)!bVar11 * auVar567._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar603._12_4_ = (uint)bVar11 * auVar560._12_4_ | (uint)!bVar11 * auVar567._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar603._16_4_ = (uint)bVar11 * auVar560._16_4_ | (uint)!bVar11 * auVar567._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar603._20_4_ = (uint)bVar11 * auVar560._20_4_ | (uint)!bVar11 * auVar567._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar603._24_4_ = (uint)bVar11 * auVar560._24_4_ | (uint)!bVar11 * auVar567._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar603._28_4_ = (uint)bVar11 * auVar560._28_4_ | (uint)!bVar11 * auVar567._28_4_;
              auVar566 = vfmadd231ps_avx512vl(auVar566,auVar603,auVar672);
              auVar566 = vfmsub231ps_avx512vl(auVar566,auVar675,auVar559);
              auVar566 = vsubps_avx(auVar566,auVar602);
              auVar566 = vfmsub231ps_avx512vl(auVar566,auVar684,auVar603);
              bVar11 = (bool)((byte)uVar426 & 1);
              auVar604._0_4_ = (uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar566._0_4_;
              bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
              auVar604._4_4_ = (uint)bVar11 * auVar671._4_4_ | (uint)!bVar11 * auVar566._4_4_;
              bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
              auVar604._8_4_ = (uint)bVar11 * auVar671._8_4_ | (uint)!bVar11 * auVar566._8_4_;
              bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
              auVar604._12_4_ = (uint)bVar11 * auVar671._12_4_ | (uint)!bVar11 * auVar566._12_4_;
              bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
              auVar604._16_4_ = (uint)bVar11 * auVar671._16_4_ | (uint)!bVar11 * auVar566._16_4_;
              bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
              auVar604._20_4_ = (uint)bVar11 * auVar671._20_4_ | (uint)!bVar11 * auVar566._20_4_;
              bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
              auVar604._24_4_ = (uint)bVar11 * auVar671._24_4_ | (uint)!bVar11 * auVar566._24_4_;
              bVar11 = SUB81(uVar426 >> 7,0);
              auVar604._28_4_ = (uint)bVar11 * auVar671._28_4_ | (uint)!bVar11 * auVar566._28_4_;
              auVar559._0_4_ = *ptr1;
              auVar278._4_4_ = auVar559._0_4_;
              auVar278._0_4_ = auVar559._0_4_;
              auVar278._8_4_ = auVar559._0_4_;
              auVar278._12_4_ = auVar559._0_4_;
              auVar278._16_4_ = auVar559._0_4_;
              auVar278._20_4_ = auVar559._0_4_;
              auVar278._24_4_ = auVar559._0_4_;
              auVar278._28_4_ = auVar559._0_4_;
              auVar566 = vmulps_avx512vl(auVar604,auVar278);
              auVar566 = vminps_avx512vl(auVar566,auVar676);
              auVar566 = vmaxps_avx512vl(auVar566,auVar677);
              auVar567 = vfmadd231ps_avx512vl(auVar675,auVar566,auVar680);
              auVar559 = vrndscaleps_avx512vl(auVar567,1);
              uVar46 = vcmpps_avx512vl(auVar567,auVar559,1);
              auVar567 = vsubps_avx512vl(auVar559,auVar1297);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar605._0_4_ = (uint)bVar11 * auVar567._0_4_ | (uint)!bVar11 * auVar559._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar605._4_4_ = (uint)bVar11 * auVar567._4_4_ | (uint)!bVar11 * auVar559._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar605._8_4_ = (uint)bVar11 * auVar567._8_4_ | (uint)!bVar11 * auVar559._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar605._12_4_ = (uint)bVar11 * auVar567._12_4_ | (uint)!bVar11 * auVar559._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar605._16_4_ = (uint)bVar11 * auVar567._16_4_ | (uint)!bVar11 * auVar559._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar605._20_4_ = (uint)bVar11 * auVar567._20_4_ | (uint)!bVar11 * auVar559._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar605._24_4_ = (uint)bVar11 * auVar567._24_4_ | (uint)!bVar11 * auVar559._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar605._28_4_ = (uint)bVar11 * auVar567._28_4_ | (uint)!bVar11 * auVar559._28_4_;
              auVar566 = vfmsub231ps_avx512vl(auVar566,auVar605,auVar684);
              auVar566 = vfnmsub231ps_avx512vl(auVar566,auVar605,auVar672);
              auVar567 = vfmadd213ps_avx512vl(auVar681,auVar566,auVar682);
              auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar562);
              auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar563);
              auVar559 = vmulps_avx512vl(auVar566,auVar566);
              auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar564);
              auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar675);
              auVar566 = vfmadd213ps_avx512vl(auVar567,auVar559,auVar566);
              auVar567 = vcvttps2dq_avx512vl(auVar605);
              auVar567 = vpslld_avx2(auVar567,0x17);
              auVar567 = vpaddd_avx512vl(auVar567,auVar565);
              auVar492 = vfmadd213ps_fma(auVar567,auVar566,auVar567);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar492);
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar423 = iVar423 + -1;
            } while (iVar423 != 0);
          }
        }
        afVar419 = _ps512_cephes_log_p8;
        afVar418 = _ps512_cephes_log_p7;
        afVar417 = _ps512_cephes_log_p6;
        afVar416 = _ps512_cephes_log_p5;
        afVar415 = _ps512_cephes_log_p4;
        afVar414 = _ps512_cephes_log_p3;
        afVar413 = _ps512_cephes_log_p2;
        afVar412 = ::_ps512_cephes_exp_p4;
        afVar411 = ::_ps512_cephes_exp_p3;
        afVar410 = ::_ps512_cephes_exp_p2;
        afVar409 = ::_ps512_cephes_exp_p1;
        afVar408 = ::_ps512_cephes_exp_p0;
        afVar407 = ::_ps512_cephes_LOG2EF;
        afVar406 = ::_ps512_exp_lo;
        afVar405 = ::_ps512_exp_hi;
        afVar404 = ::_ps512_1;
        if (iVar421 != 4) {
          return;
        }
        uVar424 = 0;
        if (3 < (int)uVar422) {
          auVar671 = ::_ps512_1._0_32_;
          auVar730 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar712 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar713 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar714 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar715 = vpxord_avx512f(auVar730,auVar713);
          auVar716 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar462 = ::_ps512_exp_lo._0_16_;
          auVar717 = vpxord_avx512f(auVar716,auVar713);
          auVar713 = vpxord_avx512f(auVar714,auVar713);
          iVar421 = 3;
          auVar492 = vxorps_avx512vl(auVar504,auVar504);
          auVar718 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          do {
            auVar719 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,
                                      (undefined1  [64])_ps512_min_norm_pos);
            auVar720 = vpsrld_avx512f(auVar719,0x17);
            auVar719 = vpternlogd_avx512f(auVar719,auVar730,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar46 = vcmpps_avx512f(auVar719,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar721 = vsubps_avx512f(auVar719,(undefined1  [64])afVar404);
            auVar559._0_4_ = ptr1[2];
            auVar1236._4_4_ = auVar559._0_4_;
            auVar1236._0_4_ = auVar559._0_4_;
            auVar1236._8_4_ = auVar559._0_4_;
            auVar1236._12_4_ = auVar559._0_4_;
            auVar719 = vaddps_avx512f(auVar721,auVar719);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar782._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar721._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar782._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar721._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar782._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar721._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar782._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar721._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar782._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar721._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar782._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar721._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar782._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar721._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar782._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar721._28_4_;
            bVar28 = (byte)(uVar46 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar782._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar721._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar782._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar721._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar782._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar721._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar782._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar721._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar782._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar721._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar782._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar721._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar782._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar721._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar782._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar721._60_4_;
            auVar559._0_4_ = ptr1[3];
            auVar1236._20_4_ = auVar559._0_4_;
            auVar1236._16_4_ = auVar559._0_4_;
            auVar1236._24_4_ = auVar559._0_4_;
            auVar1236._28_4_ = auVar559._0_4_;
            auVar719 = vfmadd132ps_avx512f(auVar782,(undefined1  [64])_ps512_cephes_log_p1,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar782,(undefined1  [64])afVar413);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar782,(undefined1  [64])afVar414);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar782,(undefined1  [64])afVar415);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar782,(undefined1  [64])afVar416);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar782,(undefined1  [64])afVar417);
            auVar721 = vmulps_avx512f(auVar782,auVar782);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar782,(undefined1  [64])afVar418);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar782,(undefined1  [64])afVar419);
            auVar722 = vmulps_avx512f(auVar721,auVar782);
            auVar719 = vfmadd213ps_avx512f(auVar722,auVar719,auVar782);
            auVar559._0_4_ = *ptr1;
            auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar672 = vinsertf32x4_avx512vl
                                 (ZEXT1632(CONCAT412(auVar559._0_4_,
                                                     CONCAT48(auVar559._0_4_,
                                                              CONCAT44(auVar559._0_4_,auVar559._0_4_
                                                                      )))),auVar493,1);
            uVar426 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar492),2);
            auVar720 = vpsubd_avx512f(auVar720,auVar712);
            auVar722 = vinsertf64x4_avx512f(ZEXT3264(auVar672),auVar1236,1);
            auVar720 = vcvtdq2ps_avx512f(auVar720);
            auVar723 = vaddps_avx512f(auVar720,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar783._0_4_ = (uint)bVar11 * auVar720._0_4_ | (uint)!bVar11 * auVar723._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar783._4_4_ = (uint)bVar11 * auVar720._4_4_ | (uint)!bVar11 * auVar723._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar783._8_4_ = (uint)bVar11 * auVar720._8_4_ | (uint)!bVar11 * auVar723._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar783._12_4_ = (uint)bVar11 * auVar720._12_4_ | (uint)!bVar11 * auVar723._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar783._16_4_ = (uint)bVar11 * auVar720._16_4_ | (uint)!bVar11 * auVar723._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar783._20_4_ = (uint)bVar11 * auVar720._20_4_ | (uint)!bVar11 * auVar723._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar783._24_4_ = (uint)bVar11 * auVar720._24_4_ | (uint)!bVar11 * auVar723._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar783._28_4_ = (uint)bVar11 * auVar720._28_4_ | (uint)!bVar11 * auVar723._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar783._32_4_ = (uint)bVar11 * auVar720._32_4_ | (uint)!bVar11 * auVar723._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar783._36_4_ = (uint)bVar11 * auVar720._36_4_ | (uint)!bVar11 * auVar723._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar783._40_4_ = (uint)bVar11 * auVar720._40_4_ | (uint)!bVar11 * auVar723._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar783._44_4_ = (uint)bVar11 * auVar720._44_4_ | (uint)!bVar11 * auVar723._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar783._48_4_ = (uint)bVar11 * auVar720._48_4_ | (uint)!bVar11 * auVar723._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar783._52_4_ = (uint)bVar11 * auVar720._52_4_ | (uint)!bVar11 * auVar723._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar783._56_4_ = (uint)bVar11 * auVar720._56_4_ | (uint)!bVar11 * auVar723._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar783._60_4_ = (uint)bVar11 * auVar720._60_4_ | (uint)!bVar11 * auVar723._60_4_;
            auVar719 = vfmadd231ps_avx512f(auVar719,auVar783,auVar714);
            auVar719 = vfmadd231ps_avx512f(auVar719,auVar715,auVar721);
            auVar719 = vfmadd231ps_avx512f(auVar719,auVar716,auVar783);
            bVar11 = (bool)((byte)uVar426 & 1);
            auVar784._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar719._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar784._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar719._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar784._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar719._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar784._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar719._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar784._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar719._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar784._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar719._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar784._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar719._24_4_;
            bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
            auVar784._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar719._28_4_;
            bVar11 = (bool)((byte)(uVar426 >> 8) & 1);
            auVar784._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar719._32_4_;
            bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
            auVar784._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar719._36_4_;
            bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
            auVar784._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar719._40_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
            auVar784._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar719._44_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
            auVar784._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar719._48_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
            auVar784._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar719._52_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
            auVar784._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar719._56_4_;
            bVar11 = SUB81(uVar426 >> 0xf,0);
            auVar784._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar719._60_4_;
            auVar719 = vmulps_avx512f(auVar784,auVar722);
            auVar719 = vminps_avx512f(auVar719,(undefined1  [64])afVar405);
            auVar719 = vmaxps_avx512f(auVar719,(undefined1  [64])afVar406);
            auVar720 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar719,auVar730);
            auVar721 = vrndscaleps_avx512f(auVar720,1);
            uVar46 = vcmpps_avx512f(auVar720,auVar721,1);
            auVar720 = vsubps_avx512f(auVar721,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar785._0_4_ = (uint)bVar11 * auVar720._0_4_ | (uint)!bVar11 * auVar721._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar785._4_4_ = (uint)bVar11 * auVar720._4_4_ | (uint)!bVar11 * auVar721._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar785._8_4_ = (uint)bVar11 * auVar720._8_4_ | (uint)!bVar11 * auVar721._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar785._12_4_ = (uint)bVar11 * auVar720._12_4_ | (uint)!bVar11 * auVar721._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar785._16_4_ = (uint)bVar11 * auVar720._16_4_ | (uint)!bVar11 * auVar721._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar785._20_4_ = (uint)bVar11 * auVar720._20_4_ | (uint)!bVar11 * auVar721._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar785._24_4_ = (uint)bVar11 * auVar720._24_4_ | (uint)!bVar11 * auVar721._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar785._28_4_ = (uint)bVar11 * auVar720._28_4_ | (uint)!bVar11 * auVar721._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar785._32_4_ = (uint)bVar11 * auVar720._32_4_ | (uint)!bVar11 * auVar721._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar785._36_4_ = (uint)bVar11 * auVar720._36_4_ | (uint)!bVar11 * auVar721._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar785._40_4_ = (uint)bVar11 * auVar720._40_4_ | (uint)!bVar11 * auVar721._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar785._44_4_ = (uint)bVar11 * auVar720._44_4_ | (uint)!bVar11 * auVar721._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar785._48_4_ = (uint)bVar11 * auVar720._48_4_ | (uint)!bVar11 * auVar721._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar785._52_4_ = (uint)bVar11 * auVar720._52_4_ | (uint)!bVar11 * auVar721._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar785._56_4_ = (uint)bVar11 * auVar720._56_4_ | (uint)!bVar11 * auVar721._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar785._60_4_ = (uint)bVar11 * auVar720._60_4_ | (uint)!bVar11 * auVar721._60_4_;
            auVar719 = vfmadd231ps_avx512f(auVar719,auVar785,auVar717);
            auVar719 = vfmadd231ps_avx512f(auVar719,auVar785,auVar713);
            auVar720 = vfmadd213ps_avx512f(auVar719,(undefined1  [64])afVar408,
                                           (undefined1  [64])afVar409);
            auVar721 = vmulps_avx512f(auVar719,auVar719);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar410);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar411);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,(undefined1  [64])afVar412);
            auVar720 = vfmadd213ps_avx512f(auVar720,auVar719,auVar730);
            auVar719 = vfmadd213ps_avx512f(auVar720,auVar721,auVar719);
            auVar719 = vaddps_avx512f(auVar719,(undefined1  [64])afVar404);
            auVar720 = vcvttps2dq_avx512f(auVar785);
            auVar720 = vpaddd_avx512f(auVar720,auVar712);
            auVar720 = vpslld_avx512f(auVar720,0x17);
            auVar719 = vmulps_avx512f(auVar719,auVar720);
            *(undefined1 (*) [64])outptr = auVar719;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 4;
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 4;
          } while (iVar421 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffc;
        }
        auVar492 = auVar671._0_16_;
        if ((int)(uVar424 | 1) < (int)uVar422) {
          auVar1120._8_4_ = 0xffffff82;
          auVar1120._0_8_ = 0xffffff82ffffff82;
          auVar1120._12_4_ = 0xffffff82;
          auVar1120._16_4_ = 0xffffff82;
          auVar1120._20_4_ = 0xffffff82;
          auVar1120._24_4_ = 0xffffff82;
          auVar1120._28_4_ = 0xffffff82;
          auVar1180._8_4_ = 0x3f3504f3;
          auVar1180._0_8_ = 0x3f3504f33f3504f3;
          auVar1180._12_4_ = 0x3f3504f3;
          auVar1180._16_4_ = 0x3f3504f3;
          auVar1180._20_4_ = 0x3f3504f3;
          auVar1180._24_4_ = 0x3f3504f3;
          auVar1180._28_4_ = 0x3f3504f3;
          auVar1237._8_4_ = 0xbf800000;
          auVar1237._0_8_ = 0xbf800000bf800000;
          auVar1237._12_4_ = 0xbf800000;
          auVar1237._16_4_ = 0xbf800000;
          auVar1237._20_4_ = 0xbf800000;
          auVar1237._24_4_ = 0xbf800000;
          auVar1237._28_4_ = 0xbf800000;
          auVar1298._8_4_ = 0x3f800000;
          auVar1298._0_8_ = 0x3f8000003f800000;
          auVar1298._12_4_ = 0x3f800000;
          auVar1298._16_4_ = 0x3f800000;
          auVar1298._20_4_ = 0x3f800000;
          auVar1298._24_4_ = 0x3f800000;
          auVar1298._28_4_ = 0x3f800000;
          auVar1356._8_4_ = 0x3d9021bb;
          auVar1356._0_8_ = 0x3d9021bb3d9021bb;
          auVar1356._12_4_ = 0x3d9021bb;
          auVar1356._16_4_ = 0x3d9021bb;
          auVar1356._20_4_ = 0x3d9021bb;
          auVar1356._24_4_ = 0x3d9021bb;
          auVar1356._28_4_ = 0x3d9021bb;
          auVar1412._8_4_ = 0xbdebd1b8;
          auVar1412._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1412._12_4_ = 0xbdebd1b8;
          auVar1412._16_4_ = 0xbdebd1b8;
          auVar1412._20_4_ = 0xbdebd1b8;
          auVar1412._24_4_ = 0xbdebd1b8;
          auVar1412._28_4_ = 0xbdebd1b8;
          auVar1466._8_4_ = 0x3def251a;
          auVar1466._0_8_ = 0x3def251a3def251a;
          auVar1466._12_4_ = 0x3def251a;
          auVar1466._16_4_ = 0x3def251a;
          auVar1466._20_4_ = 0x3def251a;
          auVar1466._24_4_ = 0x3def251a;
          auVar1466._28_4_ = 0x3def251a;
          auVar1520._8_4_ = 0xbdfe5d4f;
          auVar1520._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1520._12_4_ = 0xbdfe5d4f;
          auVar1520._16_4_ = 0xbdfe5d4f;
          auVar1520._20_4_ = 0xbdfe5d4f;
          auVar1520._24_4_ = 0xbdfe5d4f;
          auVar1520._28_4_ = 0xbdfe5d4f;
          auVar1574._8_4_ = 0x3e11e9bf;
          auVar1574._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1574._12_4_ = 0x3e11e9bf;
          auVar1574._16_4_ = 0x3e11e9bf;
          auVar1574._20_4_ = 0x3e11e9bf;
          auVar1574._24_4_ = 0x3e11e9bf;
          auVar1574._28_4_ = 0x3e11e9bf;
          auVar1628._8_4_ = 0xbe2aae50;
          auVar1628._0_8_ = 0xbe2aae50be2aae50;
          auVar1628._12_4_ = 0xbe2aae50;
          auVar1628._16_4_ = 0xbe2aae50;
          auVar1628._20_4_ = 0xbe2aae50;
          auVar1628._24_4_ = 0xbe2aae50;
          auVar1628._28_4_ = 0xbe2aae50;
          auVar1682._8_4_ = 0x3e4cceac;
          auVar1682._0_8_ = 0x3e4cceac3e4cceac;
          auVar1682._12_4_ = 0x3e4cceac;
          auVar1682._16_4_ = 0x3e4cceac;
          auVar1682._20_4_ = 0x3e4cceac;
          auVar1682._24_4_ = 0x3e4cceac;
          auVar1682._28_4_ = 0x3e4cceac;
          auVar1734._8_4_ = 0xbe7ffffc;
          auVar1734._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1734._12_4_ = 0xbe7ffffc;
          auVar1734._16_4_ = 0xbe7ffffc;
          auVar1734._20_4_ = 0xbe7ffffc;
          auVar1734._24_4_ = 0xbe7ffffc;
          auVar1734._28_4_ = 0xbe7ffffc;
          auVar1785._8_4_ = 0x3eaaaaaa;
          auVar1785._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar1785._12_4_ = 0x3eaaaaaa;
          auVar1785._16_4_ = 0x3eaaaaaa;
          auVar1785._20_4_ = 0x3eaaaaaa;
          auVar1785._24_4_ = 0x3eaaaaaa;
          auVar1785._28_4_ = 0x3eaaaaaa;
          auVar672 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar684 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar462 = vxorps_avx512vl(auVar462,auVar462);
          auVar671 = vpcmpeqd_avx2(auVar671,auVar671);
          auVar492 = auVar671._0_16_;
          auVar676 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar681 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar682 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar563 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar564 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar565 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          uVar872 = uVar424;
          do {
            auVar279._8_4_ = 0x800000;
            auVar279._0_8_ = 0x80000000800000;
            auVar279._12_4_ = 0x800000;
            auVar279._16_4_ = 0x800000;
            auVar279._20_4_ = 0x800000;
            auVar279._24_4_ = 0x800000;
            auVar279._28_4_ = 0x800000;
            auVar566 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar279);
            auVar567 = vpsrld_avx512vl(auVar566,0x17);
            auVar979._8_4_ = 0x807fffff;
            auVar979._0_8_ = 0x807fffff807fffff;
            auVar979._12_4_ = 0x807fffff;
            auVar979._16_4_ = 0x807fffff;
            auVar979._20_4_ = 0x807fffff;
            auVar979._24_4_ = 0x807fffff;
            auVar979._28_4_ = 0x807fffff;
            auVar280._8_4_ = 0x3f000000;
            auVar280._0_8_ = 0x3f0000003f000000;
            auVar280._12_4_ = 0x3f000000;
            auVar280._16_4_ = 0x3f000000;
            auVar280._20_4_ = 0x3f000000;
            auVar280._24_4_ = 0x3f000000;
            auVar280._28_4_ = 0x3f000000;
            auVar566 = vpternlogd_avx512vl(auVar566,auVar979,auVar280,0xea);
            uVar46 = vcmpps_avx512vl(auVar566,auVar1180,1);
            auVar559 = vaddps_avx512vl(auVar566,auVar1237);
            auVar566 = vaddps_avx512vl(auVar559,auVar566);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar606._0_4_ = (uint)bVar11 * auVar566._0_4_ | (uint)!bVar11 * auVar559._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar606._4_4_ = (uint)bVar11 * auVar566._4_4_ | (uint)!bVar11 * auVar559._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar606._8_4_ = (uint)bVar11 * auVar566._8_4_ | (uint)!bVar11 * auVar559._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar606._12_4_ = (uint)bVar11 * auVar566._12_4_ | (uint)!bVar11 * auVar559._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar606._16_4_ = (uint)bVar11 * auVar566._16_4_ | (uint)!bVar11 * auVar559._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar606._20_4_ = (uint)bVar11 * auVar566._20_4_ | (uint)!bVar11 * auVar559._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar606._24_4_ = (uint)bVar11 * auVar566._24_4_ | (uint)!bVar11 * auVar559._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar606._28_4_ = (uint)bVar11 * auVar566._28_4_ | (uint)!bVar11 * auVar559._28_4_;
            auVar566 = vfmadd213ps_avx512vl(auVar1356,auVar606,auVar1412);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar606,auVar1466);
            uVar426 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                      ZEXT1632(auVar462),2);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar606,auVar1520);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar606,auVar1574);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar606,auVar1628);
            auVar559 = vmulps_avx512vl(auVar606,auVar606);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar606,auVar1682);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar606,auVar1734);
            auVar560 = vmulps_avx512vl(auVar559,auVar606);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar606,auVar1785);
            auVar566 = vmulps_avx512vl(auVar560,auVar566);
            auVar567 = vpaddd_avx512vl(auVar567,auVar1120);
            auVar567 = vcvtdq2ps_avx512vl(auVar567);
            auVar560 = vsubps_avx512vl(auVar567,auVar1298);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar607._0_4_ = (uint)bVar11 * auVar560._0_4_ | (uint)!bVar11 * auVar567._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar607._4_4_ = (uint)bVar11 * auVar560._4_4_ | (uint)!bVar11 * auVar567._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar607._8_4_ = (uint)bVar11 * auVar560._8_4_ | (uint)!bVar11 * auVar567._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar607._12_4_ = (uint)bVar11 * auVar560._12_4_ | (uint)!bVar11 * auVar567._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar607._16_4_ = (uint)bVar11 * auVar560._16_4_ | (uint)!bVar11 * auVar567._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar607._20_4_ = (uint)bVar11 * auVar560._20_4_ | (uint)!bVar11 * auVar567._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar607._24_4_ = (uint)bVar11 * auVar560._24_4_ | (uint)!bVar11 * auVar567._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar607._28_4_ = (uint)bVar11 * auVar560._28_4_ | (uint)!bVar11 * auVar567._28_4_;
            auVar566 = vfmadd231ps_avx512vl(auVar566,auVar607,auVar672);
            auVar566 = vfmsub231ps_avx512vl(auVar566,auVar675,auVar559);
            auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar566 = vsubps_avx(auVar566,auVar606);
            auVar559._0_4_ = ptr1[1];
            auVar1012._4_4_ = auVar559._0_4_;
            auVar1012._0_4_ = auVar559._0_4_;
            auVar1012._8_4_ = auVar559._0_4_;
            auVar1012._12_4_ = auVar559._0_4_;
            auVar567 = vinsertf32x4_avx512vl(ZEXT1632(auVar493),auVar1012,1);
            auVar566 = vfmsub231ps_avx512vl(auVar566,auVar684,auVar607);
            bVar11 = (bool)((byte)uVar426 & 1);
            bVar12 = (bool)((byte)(uVar426 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar426 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar426 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar426 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar426 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar426 >> 6) & 1);
            bVar18 = SUB81(uVar426 >> 7,0);
            auVar375._4_4_ =
                 (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar566._4_4_) *
                 auVar567._4_4_;
            auVar375._0_4_ =
                 (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar566._0_4_) *
                 auVar567._0_4_;
            auVar375._8_4_ =
                 (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar566._8_4_) *
                 auVar567._8_4_;
            auVar375._12_4_ =
                 (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar566._12_4_) *
                 auVar567._12_4_;
            auVar375._16_4_ =
                 (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar566._16_4_) *
                 auVar567._16_4_;
            auVar375._20_4_ =
                 (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar566._20_4_) *
                 auVar567._20_4_;
            auVar375._24_4_ =
                 (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar566._24_4_) *
                 auVar567._24_4_;
            auVar375._28_4_ = (uint)bVar18 * auVar671._28_4_ | (uint)!bVar18 * auVar566._28_4_;
            auVar566 = vminps_avx512vl(auVar375,auVar676);
            auVar566 = vmaxps_avx512vl(auVar566,auVar677);
            auVar567 = vfmadd231ps_avx512vl(auVar675,auVar566,auVar680);
            auVar559 = vrndscaleps_avx512vl(auVar567,1);
            uVar46 = vcmpps_avx512vl(auVar567,auVar559,1);
            auVar567 = vsubps_avx512vl(auVar559,auVar1298);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar608._0_4_ = (uint)bVar11 * auVar567._0_4_ | (uint)!bVar11 * auVar559._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar608._4_4_ = (uint)bVar11 * auVar567._4_4_ | (uint)!bVar11 * auVar559._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar608._8_4_ = (uint)bVar11 * auVar567._8_4_ | (uint)!bVar11 * auVar559._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar608._12_4_ = (uint)bVar11 * auVar567._12_4_ | (uint)!bVar11 * auVar559._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar608._16_4_ = (uint)bVar11 * auVar567._16_4_ | (uint)!bVar11 * auVar559._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar608._20_4_ = (uint)bVar11 * auVar567._20_4_ | (uint)!bVar11 * auVar559._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar608._24_4_ = (uint)bVar11 * auVar567._24_4_ | (uint)!bVar11 * auVar559._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar608._28_4_ = (uint)bVar11 * auVar567._28_4_ | (uint)!bVar11 * auVar559._28_4_;
            auVar566 = vfmsub231ps_avx512vl(auVar566,auVar608,auVar684);
            auVar566 = vfnmsub231ps_avx512vl(auVar566,auVar608,auVar672);
            auVar567 = vfmadd213ps_avx512vl(auVar681,auVar566,auVar682);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar562);
            auVar559 = vmulps_avx512vl(auVar566,auVar566);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar563);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar564);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar675);
            auVar566 = vfmadd213ps_avx512vl(auVar567,auVar559,auVar566);
            auVar567 = vcvttps2dq_avx512vl(auVar608);
            auVar567 = vpslld_avx2(auVar567,0x17);
            auVar567 = vpaddd_avx512vl(auVar567,auVar565);
            auVar493 = vfmadd213ps_fma(auVar567,auVar566,auVar567);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar493);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar424 = uVar872 + 2;
            iVar421 = uVar872 + 3;
            uVar872 = uVar424;
          } while (iVar421 < (int)uVar422);
        }
        iVar421 = uVar422 - uVar424;
        if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
          return;
        }
        lVar425 = 0;
        auVar1099._8_4_ = 0xffffff82;
        auVar1099._0_8_ = 0xffffff82ffffff82;
        auVar1099._12_4_ = 0xffffff82;
        auVar1154._8_4_ = 0x3f3504f3;
        auVar1154._0_8_ = 0x3f3504f33f3504f3;
        auVar1154._12_4_ = 0x3f3504f3;
        auVar1205._8_4_ = 0xbf800000;
        auVar1205._0_8_ = 0xbf800000bf800000;
        auVar1205._12_4_ = 0xbf800000;
        auVar1269._8_4_ = 0x3f800000;
        auVar1269._0_8_ = 0x3f8000003f800000;
        auVar1269._12_4_ = 0x3f800000;
        auVar937._8_4_ = 0x3d9021bb;
        auVar937._0_8_ = 0x3d9021bb3d9021bb;
        auVar937._12_4_ = 0x3d9021bb;
        auVar1388._8_4_ = 0xbdebd1b8;
        auVar1388._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1388._12_4_ = 0xbdebd1b8;
        auVar1442._8_4_ = 0x3def251a;
        auVar1442._0_8_ = 0x3def251a3def251a;
        auVar1442._12_4_ = 0x3def251a;
        auVar1496._8_4_ = 0xbdfe5d4f;
        auVar1496._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1496._12_4_ = 0xbdfe5d4f;
        auVar1550._8_4_ = 0x3e11e9bf;
        auVar1550._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1550._12_4_ = 0x3e11e9bf;
        auVar1604._8_4_ = 0xbe2aae50;
        auVar1604._0_8_ = 0xbe2aae50be2aae50;
        auVar1604._12_4_ = 0xbe2aae50;
        auVar1658._8_4_ = 0x3e4cceac;
        auVar1658._0_8_ = 0x3e4cceac3e4cceac;
        auVar1658._12_4_ = 0x3e4cceac;
        auVar1712._8_4_ = 0xbe7ffffc;
        auVar1712._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1712._12_4_ = 0xbe7ffffc;
        auVar1765._8_4_ = 0x3eaaaaaa;
        auVar1765._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar1765._12_4_ = 0x3eaaaaaa;
        auVar493 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar516 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar496 = vxorps_avx512vl(auVar462,auVar462);
        auVar462 = vpcmpeqd_avx(auVar492,auVar492);
        auVar492 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar497 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar501 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar502 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar520 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar439 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar440 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar441 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        do {
          uVar46 = vcmpps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4),
                                   auVar496,2);
          auVar137._8_4_ = 0x800000;
          auVar137._0_8_ = 0x80000000800000;
          auVar137._12_4_ = 0x800000;
          auVar442 = vmaxps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4)
                                     ,auVar137);
          auVar443 = vpsrld_avx512vl(auVar442,0x17);
          auVar1021._8_4_ = 0x807fffff;
          auVar1021._0_8_ = 0x807fffff807fffff;
          auVar1021._12_4_ = 0x807fffff;
          auVar138._8_4_ = 0x3f000000;
          auVar138._0_8_ = 0x3f0000003f000000;
          auVar138._12_4_ = 0x3f000000;
          auVar442 = vpternlogd_avx512vl(auVar442,auVar1021,auVar138,0xea);
          uVar426 = vcmpps_avx512vl(auVar442,auVar1154,1);
          auVar436 = vaddps_avx512vl(auVar442,auVar1205);
          auVar442 = vaddps_avx512vl(auVar436,auVar442);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar480._0_4_ = (uint)bVar11 * auVar442._0_4_ | (uint)!bVar11 * auVar436._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar480._4_4_ = (uint)bVar11 * auVar442._4_4_ | (uint)!bVar11 * auVar436._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar480._8_4_ = (uint)bVar11 * auVar442._8_4_ | (uint)!bVar11 * auVar436._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar480._12_4_ = (uint)bVar11 * auVar442._12_4_ | (uint)!bVar11 * auVar436._12_4_;
          auVar436 = vmulps_avx512vl(auVar480,auVar480);
          auVar442 = vfmadd213ps_avx512vl(auVar937,auVar480,auVar1388);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar480,auVar1442);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar480,auVar1496);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar480,auVar1550);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar480,auVar1604);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar480,auVar1658);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar480,auVar1712);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar480,auVar1765);
          auVar437 = vmulps_avx512vl(auVar436,auVar480);
          auVar1022._0_4_ = auVar437._0_4_ * auVar442._0_4_;
          auVar1022._4_4_ = auVar437._4_4_ * auVar442._4_4_;
          auVar1022._8_4_ = auVar437._8_4_ * auVar442._8_4_;
          auVar1022._12_4_ = auVar437._12_4_ * auVar442._12_4_;
          auVar442 = vpaddd_avx512vl(auVar443,auVar1099);
          auVar442 = vcvtdq2ps_avx(auVar442);
          auVar443 = vsubps_avx512vl(auVar442,auVar1269);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar481._0_4_ = (uint)bVar11 * auVar443._0_4_ | (uint)!bVar11 * auVar442._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar481._4_4_ = (uint)bVar11 * auVar443._4_4_ | (uint)!bVar11 * auVar442._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar481._8_4_ = (uint)bVar11 * auVar443._8_4_ | (uint)!bVar11 * auVar442._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar481._12_4_ = (uint)bVar11 * auVar443._12_4_ | (uint)!bVar11 * auVar442._12_4_;
          auVar442 = vfmadd231ps_avx512vl(auVar1022,auVar481,auVar493);
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar516,auVar436);
          auVar442 = vsubps_avx512vl(auVar442,auVar480);
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar504,auVar481);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar482._0_4_ = (uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar442._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar482._4_4_ = (uint)bVar11 * auVar462._4_4_ | (uint)!bVar11 * auVar442._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar482._8_4_ = (uint)bVar11 * auVar462._8_4_ | (uint)!bVar11 * auVar442._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar482._12_4_ = (uint)bVar11 * auVar462._12_4_ | (uint)!bVar11 * auVar442._12_4_;
          uVar880 = *(undefined4 *)((long)ptr1 + lVar425);
          auVar139._4_4_ = uVar880;
          auVar139._0_4_ = uVar880;
          auVar139._8_4_ = uVar880;
          auVar139._12_4_ = uVar880;
          auVar442 = vmulps_avx512vl(auVar482,auVar139);
          auVar442 = vminps_avx512vl(auVar442,auVar492);
          auVar442 = vmaxps_avx512vl(auVar442,auVar497);
          auVar443 = vfmadd231ps_avx512vl(auVar516,auVar442,auVar498);
          auVar436 = vcvttps2dq_avx512vl(auVar443);
          auVar436 = vcvtdq2ps_avx512vl(auVar436);
          uVar46 = vcmpps_avx512vl(auVar443,auVar436,1);
          auVar443 = vsubps_avx512vl(auVar436,auVar1269);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar483._0_4_ = (uint)bVar11 * auVar443._0_4_ | (uint)!bVar11 * auVar436._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar483._4_4_ = (uint)bVar11 * auVar443._4_4_ | (uint)!bVar11 * auVar436._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar483._8_4_ = (uint)bVar11 * auVar443._8_4_ | (uint)!bVar11 * auVar436._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar483._12_4_ = (uint)bVar11 * auVar443._12_4_ | (uint)!bVar11 * auVar436._12_4_;
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar483,auVar504);
          auVar442 = vfnmsub231ps_avx512vl(auVar442,auVar483,auVar493);
          auVar1332._0_4_ = auVar442._0_4_ * auVar442._0_4_;
          auVar1332._4_4_ = auVar442._4_4_ * auVar442._4_4_;
          auVar1332._8_4_ = auVar442._8_4_ * auVar442._8_4_;
          auVar1332._12_4_ = auVar442._12_4_ * auVar442._12_4_;
          auVar443 = vfmadd213ps_avx512vl(auVar501,auVar442,auVar502);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar520);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar439);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar440);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar516);
          auVar442 = vfmadd213ps_avx512vl(auVar443,auVar1332,auVar442);
          auVar443 = vcvttps2dq_avx512vl(auVar483);
          auVar443 = vpslld_avx(auVar443,0x17);
          auVar443 = vpaddd_avx512vl(auVar443,auVar441);
          auVar442 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar443);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar442;
          lVar425 = lVar425 + 4;
          iVar421 = iVar421 + -1;
        } while (iVar421 != 0);
        return;
      }
      if (bw == 1) {
        auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        if ((int)uVar424 < 0x10) {
          uVar422 = 0;
        }
        else {
          in_ZMM4 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          in_ZMM5 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar713 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar714 = vpxord_avx512f(in_ZMM4,auVar712);
          auVar715 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar716 = vpxord_avx512f(auVar715,auVar712);
          auVar712 = vpxord_avx512f(auVar713,auVar712);
          iVar421 = 0xf;
          auVar462 = vxorps_avx512vl(auVar496,auVar496);
          auVar717 = vpternlogd_avx512f(in_ZMM30,in_ZMM30,in_ZMM30,0xff);
          do {
            auVar718 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,
                                      (undefined1  [64])_ps512_min_norm_pos);
            auVar719 = vpsrld_avx512f(auVar718,0x17);
            auVar718 = vpternlogd_avx512f(auVar718,in_ZMM4,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar46 = vcmpps_avx512f(auVar718,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar720 = vsubps_avx512f(auVar718,(undefined1  [64])afVar404);
            auVar718 = vaddps_avx512f(auVar720,auVar718);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar786._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar720._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar786._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar720._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar786._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar720._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar786._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar720._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar786._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar720._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar786._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar720._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar786._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar720._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar786._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar720._28_4_;
            bVar28 = (byte)(uVar46 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar786._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar720._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar786._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar720._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar786._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar720._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar786._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar720._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar786._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar720._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar786._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar720._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar786._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar720._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar786._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar720._60_4_;
            auVar718 = vfmadd132ps_avx512f(auVar786,(undefined1  [64])_ps512_cephes_log_p1,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar786,(undefined1  [64])afVar414);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar786,(undefined1  [64])afVar415);
            auVar720 = vmulps_avx512f(auVar786,auVar786);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar786,(undefined1  [64])afVar416);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar786,(undefined1  [64])afVar417);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar786,(undefined1  [64])afVar418);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar786,(undefined1  [64])afVar419);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar786,(undefined1  [64])afVar420);
            auVar721 = vmulps_avx512f(auVar720,auVar786);
            auVar718 = vfmadd213ps_avx512f(auVar721,auVar718,auVar786);
            auVar719 = vpsubd_avx512f(auVar719,in_ZMM5);
            auVar719 = vcvtdq2ps_avx512f(auVar719);
            auVar721 = vaddps_avx512f(auVar719,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar787._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar721._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar787._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar721._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar787._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar721._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar787._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar721._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar787._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar721._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar787._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar721._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar787._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar721._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar787._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar721._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar787._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar721._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar787._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar721._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar787._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar721._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar787._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar721._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar787._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar721._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar787._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar721._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar787._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar721._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar787._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar721._60_4_;
            uVar46 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar462),2);
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar787,auVar713);
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar714,auVar720);
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar715,auVar787);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar788._0_4_ = (uint)bVar11 * auVar717._0_4_ | (uint)!bVar11 * auVar718._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar788._4_4_ = (uint)bVar11 * auVar717._4_4_ | (uint)!bVar11 * auVar718._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar788._8_4_ = (uint)bVar11 * auVar717._8_4_ | (uint)!bVar11 * auVar718._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar788._12_4_ = (uint)bVar11 * auVar717._12_4_ | (uint)!bVar11 * auVar718._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar788._16_4_ = (uint)bVar11 * auVar717._16_4_ | (uint)!bVar11 * auVar718._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar788._20_4_ = (uint)bVar11 * auVar717._20_4_ | (uint)!bVar11 * auVar718._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar788._24_4_ = (uint)bVar11 * auVar717._24_4_ | (uint)!bVar11 * auVar718._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar788._28_4_ = (uint)bVar11 * auVar717._28_4_ | (uint)!bVar11 * auVar718._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar788._32_4_ = (uint)bVar11 * auVar717._32_4_ | (uint)!bVar11 * auVar718._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar788._36_4_ = (uint)bVar11 * auVar717._36_4_ | (uint)!bVar11 * auVar718._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar788._40_4_ = (uint)bVar11 * auVar717._40_4_ | (uint)!bVar11 * auVar718._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar788._44_4_ = (uint)bVar11 * auVar717._44_4_ | (uint)!bVar11 * auVar718._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar788._48_4_ = (uint)bVar11 * auVar717._48_4_ | (uint)!bVar11 * auVar718._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar788._52_4_ = (uint)bVar11 * auVar717._52_4_ | (uint)!bVar11 * auVar718._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar788._56_4_ = (uint)bVar11 * auVar717._56_4_ | (uint)!bVar11 * auVar718._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar788._60_4_ = (uint)bVar11 * auVar717._60_4_ | (uint)!bVar11 * auVar718._60_4_;
            auVar718 = vmulps_avx512f(auVar788,auVar730);
            auVar718 = vminps_avx512f(auVar718,(undefined1  [64])afVar405);
            auVar718 = vmaxps_avx512f(auVar718,(undefined1  [64])afVar406);
            auVar719 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar718,in_ZMM4);
            auVar720 = vrndscaleps_avx512f(auVar719,1);
            uVar46 = vcmpps_avx512f(auVar719,auVar720,1);
            auVar719 = vsubps_avx512f(auVar720,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar789._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar720._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar789._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar720._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar789._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar720._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar789._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar720._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar789._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar720._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar789._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar720._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar789._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar720._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar789._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar720._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar789._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar720._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar789._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar720._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar789._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar720._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar789._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar720._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar789._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar720._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar789._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar720._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar789._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar720._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar789._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar720._60_4_;
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar789,auVar716);
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar789,auVar712);
            auVar719 = vfmadd213ps_avx512f(auVar718,(undefined1  [64])afVar408,
                                           (undefined1  [64])afVar409);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar410);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar411);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar412);
            auVar720 = vmulps_avx512f(auVar718,auVar718);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,in_ZMM4);
            auVar718 = vfmadd213ps_avx512f(auVar719,auVar720,auVar718);
            auVar719 = vcvttps2dq_avx512f(auVar789);
            auVar718 = vaddps_avx512f(auVar718,(undefined1  [64])afVar404);
            auVar719 = vpaddd_avx512f(auVar719,in_ZMM5);
            auVar719 = vpslld_avx512f(auVar719,0x17);
            auVar718 = vmulps_avx512f(auVar718,auVar719);
            *(undefined1 (*) [64])outptr = auVar718;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 0x10;
          } while (iVar421 < (int)uVar424);
          uVar422 = uVar424 & 0x7ffffff0;
          auVar730 = ZEXT464((uint)*ptr1);
          auVar492 = auVar493;
          auVar672 = auVar675;
        }
        auVar559._0_4_ = auVar730._0_4_;
        auVar462 = auVar672._0_16_;
        if ((int)(uVar422 | 7) < (int)uVar424) {
          auVar1312._8_4_ = 0xbf800000;
          auVar1312._0_8_ = 0xbf800000bf800000;
          auVar1312._12_4_ = 0xbf800000;
          auVar1312._16_4_ = 0xbf800000;
          auVar1312._20_4_ = 0xbf800000;
          auVar1312._24_4_ = 0xbf800000;
          auVar1312._28_4_ = 0xbf800000;
          auVar1368._8_4_ = 0x3f800000;
          auVar1368._0_8_ = 0x3f8000003f800000;
          auVar1368._12_4_ = 0x3f800000;
          auVar1368._16_4_ = 0x3f800000;
          auVar1368._20_4_ = 0x3f800000;
          auVar1368._24_4_ = 0x3f800000;
          auVar1368._28_4_ = 0x3f800000;
          auVar1425._8_4_ = 0x3d9021bb;
          auVar1425._0_8_ = 0x3d9021bb3d9021bb;
          auVar1425._12_4_ = 0x3d9021bb;
          auVar1425._16_4_ = 0x3d9021bb;
          auVar1425._20_4_ = 0x3d9021bb;
          auVar1425._24_4_ = 0x3d9021bb;
          auVar1425._28_4_ = 0x3d9021bb;
          auVar1479._8_4_ = 0xbdebd1b8;
          auVar1479._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1479._12_4_ = 0xbdebd1b8;
          auVar1479._16_4_ = 0xbdebd1b8;
          auVar1479._20_4_ = 0xbdebd1b8;
          auVar1479._24_4_ = 0xbdebd1b8;
          auVar1479._28_4_ = 0xbdebd1b8;
          auVar1533._8_4_ = 0x3def251a;
          auVar1533._0_8_ = 0x3def251a3def251a;
          auVar1533._12_4_ = 0x3def251a;
          auVar1533._16_4_ = 0x3def251a;
          auVar1533._20_4_ = 0x3def251a;
          auVar1533._24_4_ = 0x3def251a;
          auVar1533._28_4_ = 0x3def251a;
          auVar1587._8_4_ = 0xbdfe5d4f;
          auVar1587._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1587._12_4_ = 0xbdfe5d4f;
          auVar1587._16_4_ = 0xbdfe5d4f;
          auVar1587._20_4_ = 0xbdfe5d4f;
          auVar1587._24_4_ = 0xbdfe5d4f;
          auVar1587._28_4_ = 0xbdfe5d4f;
          auVar1641._8_4_ = 0x3e11e9bf;
          auVar1641._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1641._12_4_ = 0x3e11e9bf;
          auVar1641._16_4_ = 0x3e11e9bf;
          auVar1641._20_4_ = 0x3e11e9bf;
          auVar1641._24_4_ = 0x3e11e9bf;
          auVar1641._28_4_ = 0x3e11e9bf;
          auVar1695._8_4_ = 0xbe2aae50;
          auVar1695._0_8_ = 0xbe2aae50be2aae50;
          auVar1695._12_4_ = 0xbe2aae50;
          auVar1695._16_4_ = 0xbe2aae50;
          auVar1695._20_4_ = 0xbe2aae50;
          auVar1695._24_4_ = 0xbe2aae50;
          auVar1695._28_4_ = 0xbe2aae50;
          auVar1746._8_4_ = 0x3e4cceac;
          auVar1746._0_8_ = 0x3e4cceac3e4cceac;
          auVar1746._12_4_ = 0x3e4cceac;
          auVar1746._16_4_ = 0x3e4cceac;
          auVar1746._20_4_ = 0x3e4cceac;
          auVar1746._24_4_ = 0x3e4cceac;
          auVar1746._28_4_ = 0x3e4cceac;
          auVar1796._8_4_ = 0xbe7ffffc;
          auVar1796._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1796._12_4_ = 0xbe7ffffc;
          auVar1796._16_4_ = 0xbe7ffffc;
          auVar1796._20_4_ = 0xbe7ffffc;
          auVar1796._24_4_ = 0xbe7ffffc;
          auVar1796._28_4_ = 0xbe7ffffc;
          auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar684 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar676 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar492 = vxorps_avx512vl(auVar492,auVar492);
          auVar671 = vpcmpeqd_avx2(auVar672,auVar672);
          auVar462 = auVar671._0_16_;
          auVar672 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar680 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar681 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar682 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar563 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar564 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar566 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          uVar872 = uVar422;
          do {
            auVar281._8_4_ = 0x800000;
            auVar281._0_8_ = 0x80000000800000;
            auVar281._12_4_ = 0x800000;
            auVar281._16_4_ = 0x800000;
            auVar281._20_4_ = 0x800000;
            auVar281._24_4_ = 0x800000;
            auVar281._28_4_ = 0x800000;
            auVar567 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar281);
            auVar560 = vpsrld_avx512vl(auVar567,0x17);
            auVar1129._8_4_ = 0x807fffff;
            auVar1129._0_8_ = 0x807fffff807fffff;
            auVar1129._12_4_ = 0x807fffff;
            auVar1129._16_4_ = 0x807fffff;
            auVar1129._20_4_ = 0x807fffff;
            auVar1129._24_4_ = 0x807fffff;
            auVar1129._28_4_ = 0x807fffff;
            auVar282._8_4_ = 0x3f000000;
            auVar282._0_8_ = 0x3f0000003f000000;
            auVar282._12_4_ = 0x3f000000;
            auVar282._16_4_ = 0x3f000000;
            auVar282._20_4_ = 0x3f000000;
            auVar282._24_4_ = 0x3f000000;
            auVar282._28_4_ = 0x3f000000;
            auVar567 = vpternlogd_avx512vl(auVar567,auVar1129,auVar282,0xea);
            auVar283._8_4_ = 0x3f3504f3;
            auVar283._0_8_ = 0x3f3504f33f3504f3;
            auVar283._12_4_ = 0x3f3504f3;
            auVar283._16_4_ = 0x3f3504f3;
            auVar283._20_4_ = 0x3f3504f3;
            auVar283._24_4_ = 0x3f3504f3;
            auVar283._28_4_ = 0x3f3504f3;
            uVar46 = vcmpps_avx512vl(auVar567,auVar283,1);
            auVar553 = vaddps_avx512vl(auVar567,auVar1312);
            auVar567 = vaddps_avx512vl(auVar553,auVar567);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar668._0_4_ = (float)((uint)bVar11 * auVar567._0_4_ | (uint)!bVar11 * auVar553._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar668._4_4_ = (float)((uint)bVar11 * auVar567._4_4_ | (uint)!bVar11 * auVar553._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar668._8_4_ = (float)((uint)bVar11 * auVar567._8_4_ | (uint)!bVar11 * auVar553._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar668._12_4_ =
                 (float)((uint)bVar11 * auVar567._12_4_ | (uint)!bVar11 * auVar553._12_4_);
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar668._16_4_ =
                 (float)((uint)bVar11 * auVar567._16_4_ | (uint)!bVar11 * auVar553._16_4_);
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar668._20_4_ =
                 (float)((uint)bVar11 * auVar567._20_4_ | (uint)!bVar11 * auVar553._20_4_);
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar668._24_4_ =
                 (float)((uint)bVar11 * auVar567._24_4_ | (uint)!bVar11 * auVar553._24_4_);
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar668._28_4_ = (uint)bVar11 * auVar567._28_4_ | (uint)!bVar11 * auVar553._28_4_;
            auVar567 = vfmadd213ps_avx512vl(auVar1425,auVar668,auVar1479);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar668,auVar1533);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar668,auVar1587);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar668,auVar1641);
            auVar1194._0_4_ = auVar668._0_4_ * auVar668._0_4_;
            auVar1194._4_4_ = auVar668._4_4_ * auVar668._4_4_;
            auVar1194._8_4_ = auVar668._8_4_ * auVar668._8_4_;
            auVar1194._12_4_ = auVar668._12_4_ * auVar668._12_4_;
            auVar1194._16_4_ = auVar668._16_4_ * auVar668._16_4_;
            auVar1194._20_4_ = auVar668._20_4_ * auVar668._20_4_;
            auVar1194._28_36_ = in_ZMM4._28_36_;
            auVar1194._24_4_ = auVar668._24_4_ * auVar668._24_4_;
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar668,auVar1695);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar668,auVar1746);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar668,auVar1796);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar668,auVar675);
            auVar1258._0_4_ = auVar1194._0_4_ * auVar668._0_4_;
            auVar1258._4_4_ = auVar1194._4_4_ * auVar668._4_4_;
            auVar1258._8_4_ = auVar1194._8_4_ * auVar668._8_4_;
            auVar1258._12_4_ = auVar1194._12_4_ * auVar668._12_4_;
            auVar1258._16_4_ = auVar1194._16_4_ * auVar668._16_4_;
            auVar1258._20_4_ = auVar1194._20_4_ * auVar668._20_4_;
            auVar1258._28_36_ = in_ZMM5._28_36_;
            auVar1258._24_4_ = auVar1194._24_4_ * auVar668._24_4_;
            auVar553 = vmulps_avx512vl(auVar1258._0_32_,auVar567);
            auVar284._8_4_ = 0xffffff82;
            auVar284._0_8_ = 0xffffff82ffffff82;
            auVar284._12_4_ = 0xffffff82;
            auVar284._16_4_ = 0xffffff82;
            auVar284._20_4_ = 0xffffff82;
            auVar284._24_4_ = 0xffffff82;
            auVar284._28_4_ = 0xffffff82;
            auVar567 = vpaddd_avx512vl(auVar560,auVar284);
            auVar567 = vcvtdq2ps_avx(auVar567);
            auVar560 = vsubps_avx512vl(auVar567,auVar1368);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar669._0_4_ = (uint)bVar11 * auVar560._0_4_ | (uint)!bVar11 * auVar567._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar669._4_4_ = (uint)bVar11 * auVar560._4_4_ | (uint)!bVar11 * auVar567._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar669._8_4_ = (uint)bVar11 * auVar560._8_4_ | (uint)!bVar11 * auVar567._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar669._12_4_ = (uint)bVar11 * auVar560._12_4_ | (uint)!bVar11 * auVar567._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar669._16_4_ = (uint)bVar11 * auVar560._16_4_ | (uint)!bVar11 * auVar567._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar669._20_4_ = (uint)bVar11 * auVar560._20_4_ | (uint)!bVar11 * auVar567._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar669._24_4_ = (uint)bVar11 * auVar560._24_4_ | (uint)!bVar11 * auVar567._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar669._28_4_ = (uint)bVar11 * auVar560._28_4_ | (uint)!bVar11 * auVar567._28_4_;
            auVar567 = vfmadd231ps_avx512vl(auVar553,auVar669,auVar684);
            auVar560 = vfmsub231ps_avx512vl(auVar567,auVar676,auVar1194._0_32_);
            uVar46 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                     ZEXT1632(auVar492),2);
            auVar567 = vsubps_avx(auVar560,auVar668);
            auVar567 = vfmsub231ps_avx512vl(auVar567,auVar677,auVar669);
            bVar11 = (bool)((byte)uVar46 & 1);
            bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar385._4_4_ =
                 (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar567._4_4_) *
                 auVar559._0_4_;
            auVar385._0_4_ =
                 (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar567._0_4_) *
                 auVar559._0_4_;
            auVar385._8_4_ =
                 (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar567._8_4_) *
                 auVar559._0_4_;
            auVar385._12_4_ =
                 (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar567._12_4_) *
                 auVar559._0_4_;
            auVar385._16_4_ =
                 (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar567._16_4_) *
                 auVar559._0_4_;
            auVar385._20_4_ =
                 (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar567._20_4_) *
                 auVar559._0_4_;
            auVar385._24_4_ =
                 (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar567._24_4_) *
                 auVar559._0_4_;
            auVar385._28_4_ = auVar669._28_4_;
            auVar567 = vminps_avx512vl(auVar385,auVar672);
            auVar553 = vmaxps_avx512vl(auVar567,auVar680);
            auVar556 = vfmadd231ps_avx512vl(auVar676,auVar553,auVar681);
            auVar567 = vroundps_avx(auVar556,1);
            uVar46 = vcmpps_avx512vl(auVar556,auVar567,1);
            auVar556 = vsubps_avx512vl(auVar567,auVar1368);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar670._0_4_ = (float)((uint)bVar11 * auVar556._0_4_ | (uint)!bVar11 * auVar567._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar670._4_4_ = (float)((uint)bVar11 * auVar556._4_4_ | (uint)!bVar11 * auVar567._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar670._8_4_ = (float)((uint)bVar11 * auVar556._8_4_ | (uint)!bVar11 * auVar567._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar670._12_4_ =
                 (float)((uint)bVar11 * auVar556._12_4_ | (uint)!bVar11 * auVar567._12_4_);
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar670._16_4_ =
                 (float)((uint)bVar11 * auVar556._16_4_ | (uint)!bVar11 * auVar567._16_4_);
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar670._20_4_ =
                 (float)((uint)bVar11 * auVar556._20_4_ | (uint)!bVar11 * auVar567._20_4_);
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar670._24_4_ =
                 (float)((uint)bVar11 * auVar556._24_4_ | (uint)!bVar11 * auVar567._24_4_);
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar670._28_4_ =
                 (float)((uint)bVar11 * auVar556._28_4_ | (uint)!bVar11 * auVar567._28_4_);
            in_ZMM4 = ZEXT3264(auVar670);
            auVar567 = vfmsub231ps_avx512vl(auVar553,auVar670,auVar677);
            auVar567 = vfnmsub231ps_avx512vl(auVar567,auVar670,auVar684);
            auVar553 = vfmadd213ps_avx512vl(auVar682,auVar567,auVar562);
            auVar386._4_4_ = auVar567._4_4_ * auVar567._4_4_;
            auVar386._0_4_ = auVar567._0_4_ * auVar567._0_4_;
            auVar386._8_4_ = auVar567._8_4_ * auVar567._8_4_;
            auVar386._12_4_ = auVar567._12_4_ * auVar567._12_4_;
            auVar386._16_4_ = auVar567._16_4_ * auVar567._16_4_;
            auVar386._20_4_ = auVar567._20_4_ * auVar567._20_4_;
            auVar386._24_4_ = auVar567._24_4_ * auVar567._24_4_;
            auVar386._28_4_ = auVar560._28_4_;
            in_ZMM5 = ZEXT3264(auVar386);
            auVar560 = vfmadd213ps_avx512vl(auVar553,auVar567,auVar563);
            auVar560 = vfmadd213ps_avx512vl(auVar560,auVar567,auVar564);
            auVar560 = vfmadd213ps_avx512vl(auVar560,auVar567,auVar565);
            auVar560 = vfmadd213ps_avx512vl(auVar560,auVar567,auVar676);
            auVar493 = vfmadd213ps_fma(auVar560,auVar386,auVar567);
            auVar1066._0_4_ = (int)auVar670._0_4_;
            auVar1066._4_4_ = (int)auVar670._4_4_;
            auVar1066._8_4_ = (int)auVar670._8_4_;
            auVar1066._12_4_ = (int)auVar670._12_4_;
            auVar1066._16_4_ = (int)auVar670._16_4_;
            auVar1066._20_4_ = (int)auVar670._20_4_;
            auVar1066._24_4_ = (int)auVar670._24_4_;
            auVar1066._28_4_ = (int)auVar670._28_4_;
            auVar567 = vpslld_avx2(auVar1066,0x17);
            auVar567 = vpaddd_avx512vl(auVar567,auVar566);
            auVar493 = vfmadd213ps_fma(auVar567,ZEXT1632(auVar493),auVar567);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar493);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar422 = uVar872 + 8;
            iVar421 = uVar872 + 0xf;
            uVar872 = uVar422;
          } while (iVar421 < (int)uVar424);
          auVar559._0_4_ = *ptr1;
        }
        if ((int)uVar424 <= (int)(uVar422 | 3)) {
          return;
        }
        lVar425 = 0;
        auVar1206._8_4_ = 0x3f3504f3;
        auVar1206._0_8_ = 0x3f3504f33f3504f3;
        auVar1206._12_4_ = 0x3f3504f3;
        auVar1270._8_4_ = 0xbf800000;
        auVar1270._0_8_ = 0xbf800000bf800000;
        auVar1270._12_4_ = 0xbf800000;
        auVar1333._8_4_ = 0x3f800000;
        auVar1333._0_8_ = 0x3f8000003f800000;
        auVar1333._12_4_ = 0x3f800000;
        auVar1100._8_4_ = 0x3d9021bb;
        auVar1100._0_8_ = 0x3d9021bb3d9021bb;
        auVar1100._12_4_ = 0x3d9021bb;
        auVar1443._8_4_ = 0xbdebd1b8;
        auVar1443._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1443._12_4_ = 0xbdebd1b8;
        auVar1497._8_4_ = 0x3def251a;
        auVar1497._0_8_ = 0x3def251a3def251a;
        auVar1497._12_4_ = 0x3def251a;
        auVar1551._8_4_ = 0xbdfe5d4f;
        auVar1551._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1551._12_4_ = 0xbdfe5d4f;
        auVar1605._8_4_ = 0x3e11e9bf;
        auVar1605._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1605._12_4_ = 0x3e11e9bf;
        auVar1659._8_4_ = 0xbe2aae50;
        auVar1659._0_8_ = 0xbe2aae50be2aae50;
        auVar1659._12_4_ = 0xbe2aae50;
        auVar1713._8_4_ = 0x3e4cceac;
        auVar1713._0_8_ = 0x3e4cceac3e4cceac;
        auVar1713._12_4_ = 0x3e4cceac;
        auVar1766._8_4_ = 0xbe7ffffc;
        auVar1766._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1766._12_4_ = 0xbe7ffffc;
        auVar493 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar516 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar496 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar492 = vxorps_avx512vl(auVar492,auVar492);
        auVar462 = vpcmpeqd_avx(auVar462,auVar462);
        auVar497 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar501 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar502 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar520 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar439 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar440 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar441 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar442 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        do {
          uVar46 = vcmpps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4),
                                   auVar492,2);
          auVar140._8_4_ = 0x800000;
          auVar140._0_8_ = 0x80000000800000;
          auVar140._12_4_ = 0x800000;
          auVar443 = vmaxps_avx512vl(*(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4)
                                     ,auVar140);
          auVar436 = vpsrld_avx512vl(auVar443,0x17);
          auVar1023._8_4_ = 0x807fffff;
          auVar1023._0_8_ = 0x807fffff807fffff;
          auVar1023._12_4_ = 0x807fffff;
          auVar141._8_4_ = 0x3f000000;
          auVar141._0_8_ = 0x3f0000003f000000;
          auVar141._12_4_ = 0x3f000000;
          auVar443 = vpternlogd_avx512vl(auVar443,auVar1023,auVar141,0xea);
          uVar426 = vcmpps_avx512vl(auVar443,auVar1206,1);
          auVar437 = vaddps_avx512vl(auVar443,auVar1270);
          auVar443 = vaddps_avx512vl(auVar437,auVar443);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar484._0_4_ = (uint)bVar11 * auVar443._0_4_ | (uint)!bVar11 * auVar437._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar484._4_4_ = (uint)bVar11 * auVar443._4_4_ | (uint)!bVar11 * auVar437._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar484._8_4_ = (uint)bVar11 * auVar443._8_4_ | (uint)!bVar11 * auVar437._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar484._12_4_ = (uint)bVar11 * auVar443._12_4_ | (uint)!bVar11 * auVar437._12_4_;
          auVar437 = vmulps_avx512vl(auVar484,auVar484);
          auVar443 = vfmadd213ps_fma(auVar1100,auVar484,auVar1443);
          auVar443 = vfmadd213ps_fma(auVar443,auVar484,auVar1497);
          auVar443 = vfmadd213ps_fma(auVar443,auVar484,auVar1551);
          auVar443 = vfmadd213ps_fma(auVar443,auVar484,auVar1605);
          auVar443 = vfmadd213ps_fma(auVar443,auVar484,auVar1659);
          auVar443 = vfmadd213ps_fma(auVar443,auVar484,auVar1713);
          auVar443 = vfmadd213ps_fma(auVar443,auVar484,auVar1766);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar484,auVar493);
          auVar431 = vmulps_avx512vl(auVar437,auVar484);
          auVar1155._0_4_ = auVar443._0_4_ * auVar431._0_4_;
          auVar1155._4_4_ = auVar443._4_4_ * auVar431._4_4_;
          auVar1155._8_4_ = auVar443._8_4_ * auVar431._8_4_;
          auVar1155._12_4_ = auVar443._12_4_ * auVar431._12_4_;
          auVar142._8_4_ = 0xffffff82;
          auVar142._0_8_ = 0xffffff82ffffff82;
          auVar142._12_4_ = 0xffffff82;
          auVar443 = vpaddd_avx512vl(auVar436,auVar142);
          auVar443 = vcvtdq2ps_avx(auVar443);
          auVar436 = vsubps_avx512vl(auVar443,auVar1333);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar485._0_4_ = (uint)bVar11 * auVar436._0_4_ | (uint)!bVar11 * auVar443._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar485._4_4_ = (uint)bVar11 * auVar436._4_4_ | (uint)!bVar11 * auVar443._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar485._8_4_ = (uint)bVar11 * auVar436._8_4_ | (uint)!bVar11 * auVar443._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar485._12_4_ = (uint)bVar11 * auVar436._12_4_ | (uint)!bVar11 * auVar443._12_4_;
          auVar443 = vfmadd231ps_avx512vl(auVar1155,auVar485,auVar516);
          auVar443 = vfmsub231ps_avx512vl(auVar443,auVar504,auVar437);
          auVar443 = vsubps_avx(auVar443,auVar484);
          auVar443 = vfmsub231ps_avx512vl(auVar443,auVar496,auVar485);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar1024._0_4_ =
               (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar443._0_4_) *
               auVar559._0_4_;
          auVar1024._4_4_ =
               (float)((uint)bVar12 * auVar462._4_4_ | (uint)!bVar12 * auVar443._4_4_) *
               auVar559._0_4_;
          auVar1024._8_4_ =
               (float)((uint)bVar13 * auVar462._8_4_ | (uint)!bVar13 * auVar443._8_4_) *
               auVar559._0_4_;
          auVar1024._12_4_ =
               (float)((uint)bVar14 * auVar462._12_4_ | (uint)!bVar14 * auVar443._12_4_) *
               auVar559._0_4_;
          auVar443 = vminps_avx512vl(auVar1024,auVar497);
          auVar436 = vmaxps_avx512vl(auVar443,auVar498);
          auVar437 = vfmadd231ps_avx512vl(auVar504,auVar436,auVar501);
          auVar1389._0_4_ = (int)auVar437._0_4_;
          auVar1389._4_4_ = (int)auVar437._4_4_;
          auVar1389._8_4_ = (int)auVar437._8_4_;
          auVar1389._12_4_ = (int)auVar437._12_4_;
          auVar443 = vcvtdq2ps_avx(auVar1389);
          uVar46 = vcmpps_avx512vl(auVar437,auVar443,1);
          auVar437 = vsubps_avx512vl(auVar443,auVar1333);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar486._0_4_ = (float)((uint)bVar11 * auVar437._0_4_ | (uint)!bVar11 * auVar443._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar486._4_4_ = (float)((uint)bVar11 * auVar437._4_4_ | (uint)!bVar11 * auVar443._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar486._8_4_ = (float)((uint)bVar11 * auVar437._8_4_ | (uint)!bVar11 * auVar443._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar486._12_4_ =
               (float)((uint)bVar11 * auVar437._12_4_ | (uint)!bVar11 * auVar443._12_4_);
          auVar443 = vfmsub231ps_avx512vl(auVar436,auVar486,auVar496);
          auVar443 = vfnmsub231ps_avx512vl(auVar443,auVar486,auVar516);
          auVar1156._0_4_ = auVar443._0_4_ * auVar443._0_4_;
          auVar1156._4_4_ = auVar443._4_4_ * auVar443._4_4_;
          auVar1156._8_4_ = auVar443._8_4_ * auVar443._8_4_;
          auVar1156._12_4_ = auVar443._12_4_ * auVar443._12_4_;
          auVar436 = vfmadd213ps_avx512vl(auVar502,auVar443,auVar520);
          auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar439);
          auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar440);
          auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar441);
          auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar504);
          auVar443 = vfmadd213ps_avx512vl(auVar436,auVar1156,auVar443);
          auVar1025._0_4_ = (int)auVar486._0_4_;
          auVar1025._4_4_ = (int)auVar486._4_4_;
          auVar1025._8_4_ = (int)auVar486._8_4_;
          auVar1025._12_4_ = (int)auVar486._12_4_;
          auVar436 = vpslld_avx(auVar1025,0x17);
          auVar436 = vpaddd_avx512vl(auVar436,auVar442);
          auVar443 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar436);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar443;
          lVar425 = lVar425 + 4;
        } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar421 == 0x10) {
        uVar46 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT864(0),2);
        auVar730 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,(undefined1  [64])_ps512_min_norm_pos);
        auVar712 = vpsrld_avx512f(auVar730,0x17);
        auVar713 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar730 = vpternlogd_avx512f(auVar730,auVar713,(undefined1  [64])_ps512_inv_mant_mask,0xec)
        ;
        auVar714 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar712 = vpsubd_avx512f(auVar712,auVar714);
        auVar712 = vcvtdq2ps_avx512f(auVar712);
        uVar426 = vcmpps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar715 = vsubps_avx512f(auVar730,(undefined1  [64])::_ps512_1);
        auVar716 = vaddps_avx512f(auVar712,(undefined1  [64])::_ps512_1);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar823._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar716._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar823._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar716._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar823._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar716._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar823._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar716._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar823._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar716._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar823._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar716._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar823._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar716._24_4_;
        bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
        auVar823._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar716._28_4_;
        bVar28 = (byte)(uVar426 >> 8);
        bVar11 = (bool)(bVar28 & 1);
        auVar823._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar716._32_4_;
        bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
        auVar823._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar716._36_4_;
        bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
        auVar823._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar716._40_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
        auVar823._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar716._44_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
        auVar823._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar716._48_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
        auVar823._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar716._52_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
        auVar823._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar716._56_4_;
        bVar11 = SUB81(uVar426 >> 0xf,0);
        auVar823._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar716._60_4_;
        auVar730 = vaddps_avx512f(auVar715,auVar730);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar824._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * auVar715._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar824._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * auVar715._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar824._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * auVar715._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar824._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * auVar715._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar824._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * auVar715._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar824._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * auVar715._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar824._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * auVar715._24_4_;
        bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
        auVar824._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * auVar715._28_4_;
        bVar11 = (bool)(bVar28 & 1);
        auVar824._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * auVar715._32_4_;
        bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
        auVar824._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * auVar715._36_4_;
        bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
        auVar824._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * auVar715._40_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
        auVar824._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * auVar715._44_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
        auVar824._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * auVar715._48_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
        auVar824._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * auVar715._52_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
        auVar824._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * auVar715._56_4_;
        bVar11 = SUB81(uVar426 >> 0xf,0);
        auVar824._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * auVar715._60_4_;
        auVar730 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar824,
                                       (undefined1  [64])_ps512_cephes_log_p1);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar824,(undefined1  [64])_ps512_cephes_log_p2);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar824,(undefined1  [64])_ps512_cephes_log_p3);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar824,(undefined1  [64])_ps512_cephes_log_p4);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar824,(undefined1  [64])_ps512_cephes_log_p5);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar824,(undefined1  [64])_ps512_cephes_log_p6);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar824,(undefined1  [64])_ps512_cephes_log_p7);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar824,(undefined1  [64])_ps512_cephes_log_p8);
        auVar712 = vmulps_avx512f(auVar824,auVar824);
        auVar715 = vmulps_avx512f(auVar712,auVar824);
        auVar730 = vmulps_avx512f(auVar715,auVar730);
        auVar730 = vfmadd231ps_avx512f(auVar730,auVar823,(undefined1  [64])_ps512_cephes_log_q1);
        auVar730 = vfmsub231ps_avx512f(auVar730,auVar713,auVar712);
        auVar730 = vsubps_avx512f(auVar730,auVar824);
        auVar730 = vfmsub231ps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_log_q2,auVar823);
        auVar712 = vpternlogd_avx512f(auVar712,auVar712,auVar712,0xff);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar825._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar730._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar825._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar730._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar825._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar730._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar825._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar730._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar825._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar730._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar825._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar730._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar825._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar730._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        auVar825._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar730._28_4_;
        bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
        auVar825._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar730._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        auVar825._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar730._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        auVar825._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar730._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        auVar825._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar730._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        auVar825._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar730._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        auVar825._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar730._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        auVar825._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar730._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        auVar825._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar730._60_4_;
        auVar730 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar712 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar730);
        auVar730 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar730);
        uVar424 = uVar422;
        do {
          auVar559._0_4_ = *ptr1;
          auVar360._4_4_ = auVar559._0_4_;
          auVar360._0_4_ = auVar559._0_4_;
          auVar360._8_4_ = auVar559._0_4_;
          auVar360._12_4_ = auVar559._0_4_;
          auVar360._16_4_ = auVar559._0_4_;
          auVar360._20_4_ = auVar559._0_4_;
          auVar360._24_4_ = auVar559._0_4_;
          auVar360._28_4_ = auVar559._0_4_;
          auVar360._32_4_ = auVar559._0_4_;
          auVar360._36_4_ = auVar559._0_4_;
          auVar360._40_4_ = auVar559._0_4_;
          auVar360._44_4_ = auVar559._0_4_;
          auVar360._48_4_ = auVar559._0_4_;
          auVar360._52_4_ = auVar559._0_4_;
          auVar360._56_4_ = auVar559._0_4_;
          auVar360._60_4_ = auVar559._0_4_;
          auVar715 = vmulps_avx512f(auVar825,auVar360);
          auVar715 = vminps_avx512f(auVar715,(undefined1  [64])afVar405);
          auVar715 = vmaxps_avx512f(auVar715,(undefined1  [64])afVar406);
          auVar716 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar715,auVar713);
          auVar717 = vrndscaleps_avx512f(auVar716,1);
          uVar46 = vcmpps_avx512f(auVar716,auVar717,1);
          auVar716 = vsubps_avx512f(auVar717,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar826._0_4_ = (uint)bVar11 * auVar716._0_4_ | (uint)!bVar11 * auVar717._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar826._4_4_ = (uint)bVar11 * auVar716._4_4_ | (uint)!bVar11 * auVar717._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar826._8_4_ = (uint)bVar11 * auVar716._8_4_ | (uint)!bVar11 * auVar717._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar826._12_4_ = (uint)bVar11 * auVar716._12_4_ | (uint)!bVar11 * auVar717._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar826._16_4_ = (uint)bVar11 * auVar716._16_4_ | (uint)!bVar11 * auVar717._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar826._20_4_ = (uint)bVar11 * auVar716._20_4_ | (uint)!bVar11 * auVar717._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar826._24_4_ = (uint)bVar11 * auVar716._24_4_ | (uint)!bVar11 * auVar717._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar826._28_4_ = (uint)bVar11 * auVar716._28_4_ | (uint)!bVar11 * auVar717._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar826._32_4_ = (uint)bVar11 * auVar716._32_4_ | (uint)!bVar11 * auVar717._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar826._36_4_ = (uint)bVar11 * auVar716._36_4_ | (uint)!bVar11 * auVar717._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar826._40_4_ = (uint)bVar11 * auVar716._40_4_ | (uint)!bVar11 * auVar717._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar826._44_4_ = (uint)bVar11 * auVar716._44_4_ | (uint)!bVar11 * auVar717._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar826._48_4_ = (uint)bVar11 * auVar716._48_4_ | (uint)!bVar11 * auVar717._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar826._52_4_ = (uint)bVar11 * auVar716._52_4_ | (uint)!bVar11 * auVar717._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar826._56_4_ = (uint)bVar11 * auVar716._56_4_ | (uint)!bVar11 * auVar717._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar826._60_4_ = (uint)bVar11 * auVar716._60_4_ | (uint)!bVar11 * auVar717._60_4_;
          auVar715 = vfmadd231ps_avx512f(auVar715,auVar826,auVar712);
          auVar715 = vfmadd231ps_avx512f(auVar715,auVar826,auVar730);
          auVar716 = vfmadd213ps_avx512f(auVar715,(undefined1  [64])afVar408,
                                         (undefined1  [64])afVar409);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar410);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar411);
          auVar717 = vmulps_avx512f(auVar715,auVar715);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar412);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,auVar713);
          auVar715 = vfmadd213ps_avx512f(auVar716,auVar717,auVar715);
          auVar715 = vaddps_avx512f(auVar715,(undefined1  [64])afVar404);
          auVar716 = vcvttps2dq_avx512f(auVar826);
          auVar716 = vpaddd_avx512f(auVar716,auVar714);
          auVar716 = vpslld_avx512f(auVar716,0x17);
          auVar715 = vmulps_avx512f(auVar715,auVar716);
          *(undefined1 (*) [64])outptr = auVar715;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
        } while (uVar424 != 0);
      }
      afVar412 = ::_ps512_cephes_exp_p4;
      afVar411 = ::_ps512_cephes_exp_p3;
      afVar410 = ::_ps512_cephes_exp_p2;
      afVar409 = ::_ps512_cephes_exp_p1;
      afVar408 = ::_ps512_cephes_exp_p0;
      afVar407 = ::_ps512_cephes_LOG2EF;
      afVar406 = ::_ps512_exp_lo;
      afVar405 = ::_ps512_exp_hi;
      afVar404 = ::_ps512_1;
      if (iVar421 == 8) {
        auVar671 = *(undefined1 (*) [32])ptr;
        uVar424 = 0;
        if (1 < (int)uVar422) {
          auVar730 = vinsertf64x4_avx512f(ZEXT3264(auVar671),auVar671,1);
          uVar46 = vcmpps_avx512f(auVar730,ZEXT1664(ZEXT816(0) << 0x40),2);
          auVar730 = vmaxps_avx512f(auVar730,(undefined1  [64])_ps512_min_norm_pos);
          auVar712 = vpsrld_avx512f(auVar730,0x17);
          auVar713 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar730 = vpternlogd_avx512f(auVar730,auVar713,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          auVar714 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar712 = vpsubd_avx512f(auVar712,auVar714);
          auVar712 = vcvtdq2ps_avx512f(auVar712);
          uVar426 = vcmpps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar715 = vsubps_avx512f(auVar730,(undefined1  [64])::_ps512_1);
          auVar716 = vaddps_avx512f(auVar712,(undefined1  [64])::_ps512_1);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar827._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar716._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar827._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar716._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar827._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar716._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar827._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar716._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar827._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar716._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar827._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar716._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar827._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar716._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar827._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar716._28_4_;
          bVar28 = (byte)(uVar426 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar827._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar716._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar827._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar716._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar827._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar716._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar827._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar716._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar827._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar716._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar827._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar716._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar827._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar716._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar827._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar716._60_4_;
          auVar730 = vaddps_avx512f(auVar715,auVar730);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar828._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * auVar715._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar828._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * auVar715._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar828._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * auVar715._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar828._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * auVar715._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar828._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * auVar715._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar828._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * auVar715._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar828._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * auVar715._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar828._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * auVar715._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar828._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * auVar715._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar828._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * auVar715._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar828._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * auVar715._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar828._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * auVar715._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar828._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * auVar715._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar828._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * auVar715._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar828._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * auVar715._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar828._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * auVar715._60_4_;
          auVar730 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar828,
                                         (undefined1  [64])_ps512_cephes_log_p1);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar828,(undefined1  [64])_ps512_cephes_log_p2);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar828,(undefined1  [64])_ps512_cephes_log_p3);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar828,(undefined1  [64])_ps512_cephes_log_p4);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar828,(undefined1  [64])_ps512_cephes_log_p5);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar828,(undefined1  [64])_ps512_cephes_log_p6);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar828,(undefined1  [64])_ps512_cephes_log_p7);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar828,(undefined1  [64])_ps512_cephes_log_p8);
          auVar712 = vmulps_avx512f(auVar828,auVar828);
          auVar715 = vmulps_avx512f(auVar712,auVar828);
          auVar730 = vmulps_avx512f(auVar715,auVar730);
          auVar730 = vfmadd231ps_avx512f(auVar730,auVar827,(undefined1  [64])_ps512_cephes_log_q1);
          auVar730 = vfmsub231ps_avx512f(auVar730,auVar713,auVar712);
          auVar730 = vsubps_avx512f(auVar730,auVar828);
          auVar730 = vfmsub231ps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_log_q2,auVar827);
          auVar712 = vpternlogd_avx512f(auVar712,auVar712,auVar712,0xff);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar829._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar730._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar829._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar730._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar829._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar730._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar829._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar730._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar829._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar730._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar829._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar730._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar829._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar730._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar829._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar730._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar829._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar730._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar829._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar730._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar829._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar730._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar829._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar730._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar829._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar730._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar829._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar730._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar829._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar730._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar829._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar730._60_4_;
          auVar730 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar712 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar730);
          auVar730 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar730);
          iVar423 = 1;
          do {
            auVar559._0_4_ = *ptr1;
            auVar672 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar715 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                     CONCAT424(auVar559._0_4_,
                                                               CONCAT420(auVar559._0_4_,
                                                                         CONCAT416(auVar559._0_4_,
                                                                                   CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar672,1);
            auVar715 = vmulps_avx512f(auVar715,auVar829);
            auVar715 = vminps_avx512f(auVar715,(undefined1  [64])afVar405);
            auVar715 = vmaxps_avx512f(auVar715,(undefined1  [64])afVar406);
            auVar716 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar715,auVar713);
            auVar717 = vrndscaleps_avx512f(auVar716,1);
            uVar46 = vcmpps_avx512f(auVar716,auVar717,1);
            auVar716 = vsubps_avx512f(auVar717,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar830._0_4_ = (uint)bVar11 * auVar716._0_4_ | (uint)!bVar11 * auVar717._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar830._4_4_ = (uint)bVar11 * auVar716._4_4_ | (uint)!bVar11 * auVar717._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar830._8_4_ = (uint)bVar11 * auVar716._8_4_ | (uint)!bVar11 * auVar717._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar830._12_4_ = (uint)bVar11 * auVar716._12_4_ | (uint)!bVar11 * auVar717._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar830._16_4_ = (uint)bVar11 * auVar716._16_4_ | (uint)!bVar11 * auVar717._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar830._20_4_ = (uint)bVar11 * auVar716._20_4_ | (uint)!bVar11 * auVar717._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar830._24_4_ = (uint)bVar11 * auVar716._24_4_ | (uint)!bVar11 * auVar717._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar830._28_4_ = (uint)bVar11 * auVar716._28_4_ | (uint)!bVar11 * auVar717._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar830._32_4_ = (uint)bVar11 * auVar716._32_4_ | (uint)!bVar11 * auVar717._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar830._36_4_ = (uint)bVar11 * auVar716._36_4_ | (uint)!bVar11 * auVar717._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar830._40_4_ = (uint)bVar11 * auVar716._40_4_ | (uint)!bVar11 * auVar717._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar830._44_4_ = (uint)bVar11 * auVar716._44_4_ | (uint)!bVar11 * auVar717._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar830._48_4_ = (uint)bVar11 * auVar716._48_4_ | (uint)!bVar11 * auVar717._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar830._52_4_ = (uint)bVar11 * auVar716._52_4_ | (uint)!bVar11 * auVar717._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar830._56_4_ = (uint)bVar11 * auVar716._56_4_ | (uint)!bVar11 * auVar717._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar830._60_4_ = (uint)bVar11 * auVar716._60_4_ | (uint)!bVar11 * auVar717._60_4_;
            auVar715 = vfmadd231ps_avx512f(auVar715,auVar830,auVar712);
            auVar715 = vfmadd231ps_avx512f(auVar715,auVar830,auVar730);
            auVar716 = vfmadd213ps_avx512f(auVar715,(undefined1  [64])afVar408,
                                           (undefined1  [64])afVar409);
            auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar410);
            auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar411);
            auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar412);
            auVar717 = vmulps_avx512f(auVar715,auVar715);
            auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,auVar713);
            auVar715 = vfmadd213ps_avx512f(auVar716,auVar717,auVar715);
            auVar716 = vcvttps2dq_avx512f(auVar830);
            auVar715 = vaddps_avx512f(auVar715,(undefined1  [64])afVar404);
            auVar716 = vpaddd_avx512f(auVar716,auVar714);
            auVar716 = vpslld_avx512f(auVar716,0x17);
            auVar715 = vmulps_avx512f(auVar715,auVar716);
            *(undefined1 (*) [64])outptr = auVar715;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          auVar285._8_4_ = 0x800000;
          auVar285._0_8_ = 0x80000000800000;
          auVar285._12_4_ = 0x800000;
          auVar285._16_4_ = 0x800000;
          auVar285._20_4_ = 0x800000;
          auVar285._24_4_ = 0x800000;
          auVar285._28_4_ = 0x800000;
          auVar672 = vmaxps_avx512vl(auVar671,auVar285);
          auVar684 = vpsrld_avx2(auVar672,0x17);
          auVar1124._8_4_ = 0x3f000000;
          auVar1124._0_8_ = 0x3f0000003f000000;
          auVar1124._12_4_ = 0x3f000000;
          auVar1124._16_4_ = 0x3f000000;
          auVar1124._20_4_ = 0x3f000000;
          auVar1124._24_4_ = 0x3f000000;
          auVar1124._28_4_ = 0x3f000000;
          auVar286._8_4_ = 0x807fffff;
          auVar286._0_8_ = 0x807fffff807fffff;
          auVar286._12_4_ = 0x807fffff;
          auVar286._16_4_ = 0x807fffff;
          auVar286._20_4_ = 0x807fffff;
          auVar286._24_4_ = 0x807fffff;
          auVar286._28_4_ = 0x807fffff;
          auVar675 = vpternlogd_avx512vl(auVar1124,auVar672,auVar286,0xf8);
          auVar287._8_4_ = 0xffffff82;
          auVar287._0_8_ = 0xffffff82ffffff82;
          auVar287._12_4_ = 0xffffff82;
          auVar287._16_4_ = 0xffffff82;
          auVar287._20_4_ = 0xffffff82;
          auVar287._24_4_ = 0xffffff82;
          auVar287._28_4_ = 0xffffff82;
          auVar672 = vpaddd_avx512vl(auVar684,auVar287);
          auVar672 = vcvtdq2ps_avx(auVar672);
          auVar288._8_4_ = 0x3f3504f3;
          auVar288._0_8_ = 0x3f3504f33f3504f3;
          auVar288._12_4_ = 0x3f3504f3;
          auVar288._16_4_ = 0x3f3504f3;
          auVar288._20_4_ = 0x3f3504f3;
          auVar288._24_4_ = 0x3f3504f3;
          auVar288._28_4_ = 0x3f3504f3;
          uVar46 = vcmpps_avx512vl(auVar675,auVar288,1);
          auVar998._8_4_ = 0xbf800000;
          auVar998._0_8_ = 0xbf800000bf800000;
          auVar998._12_4_ = 0xbf800000;
          auVar998._16_4_ = 0xbf800000;
          auVar998._20_4_ = 0xbf800000;
          auVar998._24_4_ = 0xbf800000;
          auVar998._28_4_ = 0xbf800000;
          auVar1246._0_4_ = auVar675._0_4_ + -1.0;
          auVar1246._4_4_ = auVar675._4_4_ + -1.0;
          auVar1246._8_4_ = auVar675._8_4_ + -1.0;
          auVar1246._12_4_ = auVar675._12_4_ + -1.0;
          auVar1246._16_4_ = auVar675._16_4_ + -1.0;
          auVar1246._20_4_ = auVar675._20_4_ + -1.0;
          auVar1246._24_4_ = auVar675._24_4_ + -1.0;
          auVar1246._28_4_ = auVar675._28_4_ + -1.0;
          auVar684 = vaddps_avx512vl(auVar672,auVar998);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar645._0_4_ = (uint)bVar11 * auVar684._0_4_ | (uint)!bVar11 * auVar672._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar645._4_4_ = (uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * auVar672._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar645._8_4_ = (uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * auVar672._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar645._12_4_ = (uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * auVar672._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar645._16_4_ = (uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * auVar672._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar645._20_4_ = (uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * auVar672._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar645._24_4_ = (uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * auVar672._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar645._28_4_ = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * auVar672._28_4_;
          auVar672 = vaddps_avx512vl(auVar1246,auVar675);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar646._0_4_ =
               (float)((uint)bVar11 * auVar672._0_4_ | (uint)!bVar11 * (int)auVar1246._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar646._4_4_ =
               (float)((uint)bVar11 * auVar672._4_4_ | (uint)!bVar11 * (int)auVar1246._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar646._8_4_ =
               (float)((uint)bVar11 * auVar672._8_4_ | (uint)!bVar11 * (int)auVar1246._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar646._12_4_ =
               (float)((uint)bVar11 * auVar672._12_4_ | (uint)!bVar11 * (int)auVar1246._12_4_);
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar646._16_4_ =
               (float)((uint)bVar11 * auVar672._16_4_ | (uint)!bVar11 * (int)auVar1246._16_4_);
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar646._20_4_ =
               (float)((uint)bVar11 * auVar672._20_4_ | (uint)!bVar11 * (int)auVar1246._20_4_);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar646._24_4_ =
               (float)((uint)bVar11 * auVar672._24_4_ | (uint)!bVar11 * (int)auVar1246._24_4_);
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar646._28_4_ = (uint)bVar11 * auVar672._28_4_ | (uint)!bVar11 * (int)auVar1246._28_4_;
          auVar380._4_4_ = auVar646._4_4_ * auVar646._4_4_;
          auVar380._0_4_ = auVar646._0_4_ * auVar646._0_4_;
          auVar380._8_4_ = auVar646._8_4_ * auVar646._8_4_;
          auVar380._12_4_ = auVar646._12_4_ * auVar646._12_4_;
          auVar380._16_4_ = auVar646._16_4_ * auVar646._16_4_;
          auVar380._20_4_ = auVar646._20_4_ * auVar646._20_4_;
          auVar380._24_4_ = auVar646._24_4_ * auVar646._24_4_;
          auVar380._28_4_ = auVar675._28_4_;
          auVar1305._8_4_ = 0x3d9021bb;
          auVar1305._0_8_ = 0x3d9021bb3d9021bb;
          auVar1305._12_4_ = 0x3d9021bb;
          auVar1305._16_4_ = 0x3d9021bb;
          auVar1305._20_4_ = 0x3d9021bb;
          auVar1305._24_4_ = 0x3d9021bb;
          auVar1305._28_4_ = 0x3d9021bb;
          auVar289._8_4_ = 0xbdebd1b8;
          auVar289._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar289._12_4_ = 0xbdebd1b8;
          auVar289._16_4_ = 0xbdebd1b8;
          auVar289._20_4_ = 0xbdebd1b8;
          auVar289._24_4_ = 0xbdebd1b8;
          auVar289._28_4_ = 0xbdebd1b8;
          auVar672 = vfmadd213ps_avx512vl(auVar1305,auVar646,auVar289);
          auVar290._8_4_ = 0x3def251a;
          auVar290._0_8_ = 0x3def251a3def251a;
          auVar290._12_4_ = 0x3def251a;
          auVar290._16_4_ = 0x3def251a;
          auVar290._20_4_ = 0x3def251a;
          auVar290._24_4_ = 0x3def251a;
          auVar290._28_4_ = 0x3def251a;
          auVar672 = vfmadd213ps_avx512vl(auVar672,auVar646,auVar290);
          auVar291._8_4_ = 0xbdfe5d4f;
          auVar291._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar291._12_4_ = 0xbdfe5d4f;
          auVar291._16_4_ = 0xbdfe5d4f;
          auVar291._20_4_ = 0xbdfe5d4f;
          auVar291._24_4_ = 0xbdfe5d4f;
          auVar291._28_4_ = 0xbdfe5d4f;
          auVar672 = vfmadd213ps_avx512vl(auVar672,auVar646,auVar291);
          auVar292._8_4_ = 0x3e11e9bf;
          auVar292._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar292._12_4_ = 0x3e11e9bf;
          auVar292._16_4_ = 0x3e11e9bf;
          auVar292._20_4_ = 0x3e11e9bf;
          auVar292._24_4_ = 0x3e11e9bf;
          auVar292._28_4_ = 0x3e11e9bf;
          auVar672 = vfmadd213ps_avx512vl(auVar672,auVar646,auVar292);
          auVar293._8_4_ = 0xbe2aae50;
          auVar293._0_8_ = 0xbe2aae50be2aae50;
          auVar293._12_4_ = 0xbe2aae50;
          auVar293._16_4_ = 0xbe2aae50;
          auVar293._20_4_ = 0xbe2aae50;
          auVar293._24_4_ = 0xbe2aae50;
          auVar293._28_4_ = 0xbe2aae50;
          auVar672 = vfmadd213ps_avx512vl(auVar672,auVar646,auVar293);
          auVar294._8_4_ = 0x3e4cceac;
          auVar294._0_8_ = 0x3e4cceac3e4cceac;
          auVar294._12_4_ = 0x3e4cceac;
          auVar294._16_4_ = 0x3e4cceac;
          auVar294._20_4_ = 0x3e4cceac;
          auVar294._24_4_ = 0x3e4cceac;
          auVar294._28_4_ = 0x3e4cceac;
          auVar672 = vfmadd213ps_avx512vl(auVar672,auVar646,auVar294);
          auVar295._8_4_ = 0xbe7ffffc;
          auVar295._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar295._12_4_ = 0xbe7ffffc;
          auVar295._16_4_ = 0xbe7ffffc;
          auVar295._20_4_ = 0xbe7ffffc;
          auVar295._24_4_ = 0xbe7ffffc;
          auVar295._28_4_ = 0xbe7ffffc;
          auVar672 = vfmadd213ps_avx512vl(auVar672,auVar646,auVar295);
          auVar296._8_4_ = 0x3eaaaaaa;
          auVar296._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar296._12_4_ = 0x3eaaaaaa;
          auVar296._16_4_ = 0x3eaaaaaa;
          auVar296._20_4_ = 0x3eaaaaaa;
          auVar296._24_4_ = 0x3eaaaaaa;
          auVar296._28_4_ = 0x3eaaaaaa;
          auVar672 = vfmadd213ps_avx512vl(auVar672,auVar646,auVar296);
          auVar381._4_4_ = auVar646._4_4_ * auVar646._4_4_ * auVar646._4_4_ * auVar672._4_4_;
          auVar381._0_4_ = auVar646._0_4_ * auVar646._0_4_ * auVar646._0_4_ * auVar672._0_4_;
          auVar381._8_4_ = auVar646._8_4_ * auVar646._8_4_ * auVar646._8_4_ * auVar672._8_4_;
          auVar381._12_4_ = auVar646._12_4_ * auVar646._12_4_ * auVar646._12_4_ * auVar672._12_4_;
          auVar381._16_4_ = auVar646._16_4_ * auVar646._16_4_ * auVar646._16_4_ * auVar672._16_4_;
          auVar381._20_4_ = auVar646._20_4_ * auVar646._20_4_ * auVar646._20_4_ * auVar672._20_4_;
          auVar381._24_4_ = auVar646._24_4_ * auVar646._24_4_ * auVar646._24_4_ * auVar672._24_4_;
          auVar381._28_4_ = auVar672._28_4_;
          auVar297._8_4_ = 0xb95e8083;
          auVar297._0_8_ = 0xb95e8083b95e8083;
          auVar297._12_4_ = 0xb95e8083;
          auVar297._16_4_ = 0xb95e8083;
          auVar297._20_4_ = 0xb95e8083;
          auVar297._24_4_ = 0xb95e8083;
          auVar297._28_4_ = 0xb95e8083;
          auVar672 = vfmadd231ps_avx512vl(auVar381,auVar645,auVar297);
          auVar675 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          uVar46 = vcmpps_avx512vl(auVar671,auVar675,2);
          auVar298._8_4_ = 0x3f000000;
          auVar298._0_8_ = 0x3f0000003f000000;
          auVar298._12_4_ = 0x3f000000;
          auVar298._16_4_ = 0x3f000000;
          auVar298._20_4_ = 0x3f000000;
          auVar298._24_4_ = 0x3f000000;
          auVar298._28_4_ = 0x3f000000;
          auVar671 = vfmsub231ps_avx512vl(auVar672,auVar380,auVar298);
          auVar671 = vsubps_avx(auVar671,auVar646);
          auVar299._8_4_ = 0x3f318000;
          auVar299._0_8_ = 0x3f3180003f318000;
          auVar299._12_4_ = 0x3f318000;
          auVar299._16_4_ = 0x3f318000;
          auVar299._20_4_ = 0x3f318000;
          auVar299._24_4_ = 0x3f318000;
          auVar299._28_4_ = 0x3f318000;
          auVar672 = vfmsub231ps_avx512vl(auVar671,auVar645,auVar299);
          auVar671 = vpcmpeqd_avx2(auVar675,auVar675);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar647._0_4_ = (uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar672._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar647._4_4_ = (uint)bVar11 * auVar671._4_4_ | (uint)!bVar11 * auVar672._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar647._8_4_ = (uint)bVar11 * auVar671._8_4_ | (uint)!bVar11 * auVar672._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar647._12_4_ = (uint)bVar11 * auVar671._12_4_ | (uint)!bVar11 * auVar672._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar647._16_4_ = (uint)bVar11 * auVar671._16_4_ | (uint)!bVar11 * auVar672._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar647._20_4_ = (uint)bVar11 * auVar671._20_4_ | (uint)!bVar11 * auVar672._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar647._24_4_ = (uint)bVar11 * auVar671._24_4_ | (uint)!bVar11 * auVar672._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar647._28_4_ = (uint)bVar11 * auVar671._28_4_ | (uint)!bVar11 * auVar672._28_4_;
          auVar1064._8_4_ = 0x42b0c0a5;
          auVar1064._0_8_ = 0x42b0c0a542b0c0a5;
          auVar1064._12_4_ = 0x42b0c0a5;
          auVar1064._16_4_ = 0x42b0c0a5;
          auVar1064._20_4_ = 0x42b0c0a5;
          auVar1064._24_4_ = 0x42b0c0a5;
          auVar1064._28_4_ = 0x42b0c0a5;
          auVar1125._8_4_ = 0xc2b0c0a5;
          auVar1125._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar1125._12_4_ = 0xc2b0c0a5;
          auVar1125._16_4_ = 0xc2b0c0a5;
          auVar1125._20_4_ = 0xc2b0c0a5;
          auVar1125._24_4_ = 0xc2b0c0a5;
          auVar1125._28_4_ = 0xc2b0c0a5;
          auVar1185._8_4_ = 0x3f000000;
          auVar1185._0_8_ = 0x3f0000003f000000;
          auVar1185._12_4_ = 0x3f000000;
          auVar1185._16_4_ = 0x3f000000;
          auVar1185._20_4_ = 0x3f000000;
          auVar1185._24_4_ = 0x3f000000;
          auVar1185._28_4_ = 0x3f000000;
          auVar1247._8_4_ = 0x3fb8aa3b;
          auVar1247._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar1247._12_4_ = 0x3fb8aa3b;
          auVar1247._16_4_ = 0x3fb8aa3b;
          auVar1247._20_4_ = 0x3fb8aa3b;
          auVar1247._24_4_ = 0x3fb8aa3b;
          auVar1247._28_4_ = 0x3fb8aa3b;
          auVar1306._8_4_ = 0x3f318000;
          auVar1306._0_8_ = 0x3f3180003f318000;
          auVar1306._12_4_ = 0x3f318000;
          auVar1306._16_4_ = 0x3f318000;
          auVar1306._20_4_ = 0x3f318000;
          auVar1306._24_4_ = 0x3f318000;
          auVar1306._28_4_ = 0x3f318000;
          auVar1363._8_4_ = 0x395e8083;
          auVar1363._0_8_ = 0x395e8083395e8083;
          auVar1363._12_4_ = 0x395e8083;
          auVar1363._16_4_ = 0x395e8083;
          auVar1363._20_4_ = 0x395e8083;
          auVar1363._24_4_ = 0x395e8083;
          auVar1363._28_4_ = 0x395e8083;
          auVar1420._8_4_ = 0x39506967;
          auVar1420._0_8_ = 0x3950696739506967;
          auVar1420._12_4_ = 0x39506967;
          auVar1420._16_4_ = 0x39506967;
          auVar1420._20_4_ = 0x39506967;
          auVar1420._24_4_ = 0x39506967;
          auVar1420._28_4_ = 0x39506967;
          auVar1474._8_4_ = 0x3ab743ce;
          auVar1474._0_8_ = 0x3ab743ce3ab743ce;
          auVar1474._12_4_ = 0x3ab743ce;
          auVar1474._16_4_ = 0x3ab743ce;
          auVar1474._20_4_ = 0x3ab743ce;
          auVar1474._24_4_ = 0x3ab743ce;
          auVar1474._28_4_ = 0x3ab743ce;
          auVar1528._8_4_ = 0x3c088908;
          auVar1528._0_8_ = 0x3c0889083c088908;
          auVar1528._12_4_ = 0x3c088908;
          auVar1528._16_4_ = 0x3c088908;
          auVar1528._20_4_ = 0x3c088908;
          auVar1528._24_4_ = 0x3c088908;
          auVar1528._28_4_ = 0x3c088908;
          auVar1582._8_4_ = 0x3d2aa9c1;
          auVar1582._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar1582._12_4_ = 0x3d2aa9c1;
          auVar1582._16_4_ = 0x3d2aa9c1;
          auVar1582._20_4_ = 0x3d2aa9c1;
          auVar1582._24_4_ = 0x3d2aa9c1;
          auVar1582._28_4_ = 0x3d2aa9c1;
          auVar1636._8_4_ = 0x3e2aaaaa;
          auVar1636._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar1636._12_4_ = 0x3e2aaaaa;
          auVar1636._16_4_ = 0x3e2aaaaa;
          auVar1636._20_4_ = 0x3e2aaaaa;
          auVar1636._24_4_ = 0x3e2aaaaa;
          auVar1636._28_4_ = 0x3e2aaaaa;
          auVar1690._8_4_ = 0x3f800000;
          auVar1690._0_8_ = 0x3f8000003f800000;
          auVar1690._12_4_ = 0x3f800000;
          auVar1690._16_4_ = 0x3f800000;
          auVar1690._20_4_ = 0x3f800000;
          auVar1690._24_4_ = 0x3f800000;
          auVar1690._28_4_ = 0x3f800000;
          do {
            auVar559._0_4_ = *ptr1;
            auVar300._4_4_ = auVar559._0_4_;
            auVar300._0_4_ = auVar559._0_4_;
            auVar300._8_4_ = auVar559._0_4_;
            auVar300._12_4_ = auVar559._0_4_;
            auVar300._16_4_ = auVar559._0_4_;
            auVar300._20_4_ = auVar559._0_4_;
            auVar300._24_4_ = auVar559._0_4_;
            auVar300._28_4_ = auVar559._0_4_;
            auVar671 = vmulps_avx512vl(auVar647,auVar300);
            auVar671 = vminps_avx(auVar671,auVar1064);
            auVar671 = vmaxps_avx(auVar671,auVar1125);
            auVar462 = vfmadd231ps_fma(auVar1185,auVar671,auVar1247);
            auVar672 = vrndscaleps_avx512vl(ZEXT1632(auVar462),1);
            uVar46 = vcmpps_avx512vl(ZEXT1632(auVar462),auVar672,1);
            auVar675 = vaddps_avx512vl(auVar672,auVar998);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar648._0_4_ = (uint)bVar11 * auVar675._0_4_ | (uint)!bVar11 * auVar672._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar648._4_4_ = (uint)bVar11 * auVar675._4_4_ | (uint)!bVar11 * auVar672._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar648._8_4_ = (uint)bVar11 * auVar675._8_4_ | (uint)!bVar11 * auVar672._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar648._12_4_ = (uint)bVar11 * auVar675._12_4_ | (uint)!bVar11 * auVar672._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar648._16_4_ = (uint)bVar11 * auVar675._16_4_ | (uint)!bVar11 * auVar672._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar648._20_4_ = (uint)bVar11 * auVar675._20_4_ | (uint)!bVar11 * auVar672._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar648._24_4_ = (uint)bVar11 * auVar675._24_4_ | (uint)!bVar11 * auVar672._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar648._28_4_ = (uint)bVar11 * auVar675._28_4_ | (uint)!bVar11 * auVar672._28_4_;
            auVar671 = vfmsub231ps_avx512vl(auVar671,auVar648,auVar1306);
            auVar671 = vfmsub231ps_avx512vl(auVar671,auVar648,auVar1363);
            auVar462 = vfmadd213ps_fma(auVar1420,auVar671,auVar1474);
            auVar462 = vfmadd213ps_fma(ZEXT1632(auVar462),auVar671,auVar1528);
            auVar672 = vmulps_avx512vl(auVar671,auVar671);
            auVar462 = vfmadd213ps_fma(ZEXT1632(auVar462),auVar671,auVar1582);
            auVar462 = vfmadd213ps_fma(ZEXT1632(auVar462),auVar671,auVar1636);
            auVar462 = vfmadd213ps_fma(ZEXT1632(auVar462),auVar671,auVar1185);
            auVar672 = vfmadd213ps_avx512vl(ZEXT1632(auVar462),auVar672,auVar671);
            auVar671 = vcvttps2dq_avx512vl(auVar648);
            auVar671 = vpslld_avx2(auVar671,0x17);
            auVar671 = vpaddd_avx2(auVar671,auVar1690);
            auVar462 = vfmadd213ps_fma(auVar671,auVar672,auVar671);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar462);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      afVar412 = ::_ps512_cephes_exp_p4;
      afVar411 = ::_ps512_cephes_exp_p3;
      afVar410 = ::_ps512_cephes_exp_p2;
      afVar409 = ::_ps512_cephes_exp_p1;
      afVar408 = ::_ps512_cephes_exp_p0;
      afVar407 = ::_ps512_cephes_LOG2EF;
      afVar406 = ::_ps512_exp_lo;
      afVar405 = ::_ps512_exp_hi;
      afVar404 = ::_ps512_1;
      if (iVar421 != 4) {
        return;
      }
      auVar462 = *(undefined1 (*) [16])ptr;
      auVar911._16_16_ = auVar462;
      auVar911._0_16_ = auVar462;
      uVar424 = 0;
      if (3 < (int)uVar422) {
        auVar730 = vinserti64x4_avx512f(ZEXT3264(auVar911),auVar911,1);
        uVar46 = vcmpps_avx512f(auVar730,ZEXT1664(ZEXT816(0) << 0x40),2);
        auVar730 = vmaxps_avx512f(auVar730,(undefined1  [64])_ps512_min_norm_pos);
        auVar712 = vpsrld_avx512f(auVar730,0x17);
        auVar713 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar730 = vpternlogd_avx512f(auVar730,auVar713,(undefined1  [64])_ps512_inv_mant_mask,0xec)
        ;
        auVar714 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar712 = vpsubd_avx512f(auVar712,auVar714);
        auVar712 = vcvtdq2ps_avx512f(auVar712);
        uVar426 = vcmpps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar715 = vsubps_avx512f(auVar730,(undefined1  [64])::_ps512_1);
        auVar716 = vaddps_avx512f(auVar712,(undefined1  [64])::_ps512_1);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar831._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar716._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar831._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar716._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar831._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar716._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar831._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar716._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar831._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar716._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar831._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar716._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar831._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar716._24_4_;
        bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
        auVar831._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar716._28_4_;
        bVar28 = (byte)(uVar426 >> 8);
        bVar11 = (bool)(bVar28 & 1);
        auVar831._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar716._32_4_;
        bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
        auVar831._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar716._36_4_;
        bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
        auVar831._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar716._40_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
        auVar831._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar716._44_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
        auVar831._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar716._48_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
        auVar831._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar716._52_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
        auVar831._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar716._56_4_;
        bVar11 = SUB81(uVar426 >> 0xf,0);
        auVar831._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar716._60_4_;
        auVar730 = vaddps_avx512f(auVar715,auVar730);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar832._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * auVar715._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar832._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * auVar715._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar832._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * auVar715._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar832._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * auVar715._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar832._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * auVar715._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar832._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * auVar715._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar832._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * auVar715._24_4_;
        bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
        auVar832._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * auVar715._28_4_;
        bVar11 = (bool)(bVar28 & 1);
        auVar832._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * auVar715._32_4_;
        bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
        auVar832._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * auVar715._36_4_;
        bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
        auVar832._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * auVar715._40_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
        auVar832._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * auVar715._44_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
        auVar832._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * auVar715._48_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
        auVar832._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * auVar715._52_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
        auVar832._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * auVar715._56_4_;
        bVar11 = SUB81(uVar426 >> 0xf,0);
        auVar832._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * auVar715._60_4_;
        auVar730 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar832,
                                       (undefined1  [64])_ps512_cephes_log_p1);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar832,(undefined1  [64])_ps512_cephes_log_p2);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar832,(undefined1  [64])_ps512_cephes_log_p3);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar832,(undefined1  [64])_ps512_cephes_log_p4);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar832,(undefined1  [64])_ps512_cephes_log_p5);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar832,(undefined1  [64])_ps512_cephes_log_p6);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar832,(undefined1  [64])_ps512_cephes_log_p7);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar832,(undefined1  [64])_ps512_cephes_log_p8);
        auVar712 = vmulps_avx512f(auVar832,auVar832);
        auVar715 = vmulps_avx512f(auVar712,auVar832);
        auVar730 = vmulps_avx512f(auVar715,auVar730);
        auVar730 = vfmadd231ps_avx512f(auVar730,auVar831,(undefined1  [64])_ps512_cephes_log_q1);
        auVar730 = vfmsub231ps_avx512f(auVar730,auVar713,auVar712);
        auVar730 = vsubps_avx512f(auVar730,auVar832);
        auVar730 = vfmsub231ps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_log_q2,auVar831);
        auVar712 = vpternlogd_avx512f(auVar712,auVar712,auVar712,0xff);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar833._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar730._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar833._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar730._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar833._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar730._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar833._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar730._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar833._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar730._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar833._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar730._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar833._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar730._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        auVar833._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar730._28_4_;
        bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
        auVar833._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar730._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        auVar833._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar730._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        auVar833._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar730._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        auVar833._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar730._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        auVar833._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar730._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        auVar833._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar730._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        auVar833._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar730._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        auVar833._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar730._60_4_;
        auVar730 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar712 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar730);
        auVar730 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar730);
        iVar421 = 3;
        do {
          auVar559._0_4_ = ptr1[2];
          auVar492 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
          auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar671 = vinsertf32x4_avx512vl
                               (ZEXT1632(CONCAT412(auVar559._0_4_,
                                                   CONCAT48(auVar559._0_4_,
                                                            CONCAT44(auVar559._0_4_,auVar559._0_4_))
                                                  )),auVar492,1);
          auVar492 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar672 = vinsertf32x4_avx512vl(ZEXT1632(auVar493),auVar492,1);
          auVar715 = vinsertf64x4_avx512f(ZEXT3264(auVar672),auVar671,1);
          auVar715 = vmulps_avx512f(auVar715,auVar833);
          auVar715 = vminps_avx512f(auVar715,(undefined1  [64])afVar405);
          auVar715 = vmaxps_avx512f(auVar715,(undefined1  [64])afVar406);
          auVar716 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar715,auVar713);
          auVar717 = vrndscaleps_avx512f(auVar716,1);
          uVar46 = vcmpps_avx512f(auVar716,auVar717,1);
          auVar716 = vsubps_avx512f(auVar717,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar834._0_4_ = (uint)bVar11 * auVar716._0_4_ | (uint)!bVar11 * auVar717._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar834._4_4_ = (uint)bVar11 * auVar716._4_4_ | (uint)!bVar11 * auVar717._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar834._8_4_ = (uint)bVar11 * auVar716._8_4_ | (uint)!bVar11 * auVar717._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar834._12_4_ = (uint)bVar11 * auVar716._12_4_ | (uint)!bVar11 * auVar717._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar834._16_4_ = (uint)bVar11 * auVar716._16_4_ | (uint)!bVar11 * auVar717._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar834._20_4_ = (uint)bVar11 * auVar716._20_4_ | (uint)!bVar11 * auVar717._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar834._24_4_ = (uint)bVar11 * auVar716._24_4_ | (uint)!bVar11 * auVar717._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar834._28_4_ = (uint)bVar11 * auVar716._28_4_ | (uint)!bVar11 * auVar717._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar834._32_4_ = (uint)bVar11 * auVar716._32_4_ | (uint)!bVar11 * auVar717._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar834._36_4_ = (uint)bVar11 * auVar716._36_4_ | (uint)!bVar11 * auVar717._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar834._40_4_ = (uint)bVar11 * auVar716._40_4_ | (uint)!bVar11 * auVar717._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar834._44_4_ = (uint)bVar11 * auVar716._44_4_ | (uint)!bVar11 * auVar717._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar834._48_4_ = (uint)bVar11 * auVar716._48_4_ | (uint)!bVar11 * auVar717._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar834._52_4_ = (uint)bVar11 * auVar716._52_4_ | (uint)!bVar11 * auVar717._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar834._56_4_ = (uint)bVar11 * auVar716._56_4_ | (uint)!bVar11 * auVar717._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar834._60_4_ = (uint)bVar11 * auVar716._60_4_ | (uint)!bVar11 * auVar717._60_4_;
          auVar715 = vfmadd231ps_avx512f(auVar715,auVar834,auVar712);
          auVar715 = vfmadd231ps_avx512f(auVar715,auVar834,auVar730);
          auVar716 = vfmadd213ps_avx512f(auVar715,(undefined1  [64])afVar408,
                                         (undefined1  [64])afVar409);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar410);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar411);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar412);
          auVar717 = vmulps_avx512f(auVar715,auVar715);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,auVar713);
          auVar715 = vfmadd213ps_avx512f(auVar716,auVar717,auVar715);
          auVar716 = vcvttps2dq_avx512f(auVar834);
          auVar715 = vaddps_avx512f(auVar715,(undefined1  [64])afVar404);
          auVar716 = vpaddd_avx512f(auVar716,auVar714);
          auVar716 = vpslld_avx512f(auVar716,0x17);
          auVar715 = vmulps_avx512f(auVar715,auVar716);
          *(undefined1 (*) [64])outptr = auVar715;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      if ((int)(uVar424 | 1) < (int)uVar422) {
        auVar301._8_4_ = 0x800000;
        auVar301._0_8_ = 0x80000000800000;
        auVar301._12_4_ = 0x800000;
        auVar301._16_4_ = 0x800000;
        auVar301._20_4_ = 0x800000;
        auVar301._24_4_ = 0x800000;
        auVar301._28_4_ = 0x800000;
        auVar671 = vmaxps_avx512vl(auVar911,auVar301);
        auVar675 = vpsrld_avx2(auVar671,0x17);
        auVar1126._8_4_ = 0x3f000000;
        auVar1126._0_8_ = 0x3f0000003f000000;
        auVar1126._12_4_ = 0x3f000000;
        auVar1126._16_4_ = 0x3f000000;
        auVar1126._20_4_ = 0x3f000000;
        auVar1126._24_4_ = 0x3f000000;
        auVar1126._28_4_ = 0x3f000000;
        auVar302._8_4_ = 0x807fffff;
        auVar302._0_8_ = 0x807fffff807fffff;
        auVar302._12_4_ = 0x807fffff;
        auVar302._16_4_ = 0x807fffff;
        auVar302._20_4_ = 0x807fffff;
        auVar302._24_4_ = 0x807fffff;
        auVar302._28_4_ = 0x807fffff;
        auVar672 = vpternlogd_avx512vl(auVar1126,auVar671,auVar302,0xf8);
        auVar303._8_4_ = 0xffffff82;
        auVar303._0_8_ = 0xffffff82ffffff82;
        auVar303._12_4_ = 0xffffff82;
        auVar303._16_4_ = 0xffffff82;
        auVar303._20_4_ = 0xffffff82;
        auVar303._24_4_ = 0xffffff82;
        auVar303._28_4_ = 0xffffff82;
        auVar671 = vpaddd_avx512vl(auVar675,auVar303);
        auVar671 = vcvtdq2ps_avx(auVar671);
        auVar304._8_4_ = 0x3f3504f3;
        auVar304._0_8_ = 0x3f3504f33f3504f3;
        auVar304._12_4_ = 0x3f3504f3;
        auVar304._16_4_ = 0x3f3504f3;
        auVar304._20_4_ = 0x3f3504f3;
        auVar304._24_4_ = 0x3f3504f3;
        auVar304._28_4_ = 0x3f3504f3;
        uVar46 = vcmpps_avx512vl(auVar672,auVar304,1);
        auVar999._8_4_ = 0xbf800000;
        auVar999._0_8_ = 0xbf800000bf800000;
        auVar999._12_4_ = 0xbf800000;
        auVar999._16_4_ = 0xbf800000;
        auVar999._20_4_ = 0xbf800000;
        auVar999._24_4_ = 0xbf800000;
        auVar999._28_4_ = 0xbf800000;
        auVar1248._0_4_ = auVar672._0_4_ + -1.0;
        auVar1248._4_4_ = auVar672._4_4_ + -1.0;
        auVar1248._8_4_ = auVar672._8_4_ + -1.0;
        auVar1248._12_4_ = auVar672._12_4_ + -1.0;
        auVar1248._16_4_ = auVar672._16_4_ + -1.0;
        auVar1248._20_4_ = auVar672._20_4_ + -1.0;
        auVar1248._24_4_ = auVar672._24_4_ + -1.0;
        auVar1248._28_4_ = auVar672._28_4_ + -1.0;
        auVar675 = vaddps_avx512vl(auVar671,auVar999);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar649._0_4_ = (uint)bVar11 * auVar675._0_4_ | (uint)!bVar11 * auVar671._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar649._4_4_ = (uint)bVar11 * auVar675._4_4_ | (uint)!bVar11 * auVar671._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar649._8_4_ = (uint)bVar11 * auVar675._8_4_ | (uint)!bVar11 * auVar671._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar649._12_4_ = (uint)bVar11 * auVar675._12_4_ | (uint)!bVar11 * auVar671._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar649._16_4_ = (uint)bVar11 * auVar675._16_4_ | (uint)!bVar11 * auVar671._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar649._20_4_ = (uint)bVar11 * auVar675._20_4_ | (uint)!bVar11 * auVar671._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar649._24_4_ = (uint)bVar11 * auVar675._24_4_ | (uint)!bVar11 * auVar671._24_4_;
        bVar11 = SUB81(uVar46 >> 7,0);
        auVar649._28_4_ = (uint)bVar11 * auVar675._28_4_ | (uint)!bVar11 * auVar671._28_4_;
        auVar671 = vaddps_avx512vl(auVar1248,auVar672);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar650._0_4_ =
             (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * (int)auVar1248._0_4_);
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar650._4_4_ =
             (float)((uint)bVar11 * auVar671._4_4_ | (uint)!bVar11 * (int)auVar1248._4_4_);
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar650._8_4_ =
             (float)((uint)bVar11 * auVar671._8_4_ | (uint)!bVar11 * (int)auVar1248._8_4_);
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar650._12_4_ =
             (float)((uint)bVar11 * auVar671._12_4_ | (uint)!bVar11 * (int)auVar1248._12_4_);
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar650._16_4_ =
             (float)((uint)bVar11 * auVar671._16_4_ | (uint)!bVar11 * (int)auVar1248._16_4_);
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar650._20_4_ =
             (float)((uint)bVar11 * auVar671._20_4_ | (uint)!bVar11 * (int)auVar1248._20_4_);
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar650._24_4_ =
             (float)((uint)bVar11 * auVar671._24_4_ | (uint)!bVar11 * (int)auVar1248._24_4_);
        bVar11 = SUB81(uVar46 >> 7,0);
        auVar650._28_4_ = (uint)bVar11 * auVar671._28_4_ | (uint)!bVar11 * (int)auVar1248._28_4_;
        auVar382._4_4_ = auVar650._4_4_ * auVar650._4_4_;
        auVar382._0_4_ = auVar650._0_4_ * auVar650._0_4_;
        auVar382._8_4_ = auVar650._8_4_ * auVar650._8_4_;
        auVar382._12_4_ = auVar650._12_4_ * auVar650._12_4_;
        auVar382._16_4_ = auVar650._16_4_ * auVar650._16_4_;
        auVar382._20_4_ = auVar650._20_4_ * auVar650._20_4_;
        auVar382._24_4_ = auVar650._24_4_ * auVar650._24_4_;
        auVar382._28_4_ = auVar672._28_4_;
        auVar1307._8_4_ = 0x3d9021bb;
        auVar1307._0_8_ = 0x3d9021bb3d9021bb;
        auVar1307._12_4_ = 0x3d9021bb;
        auVar1307._16_4_ = 0x3d9021bb;
        auVar1307._20_4_ = 0x3d9021bb;
        auVar1307._24_4_ = 0x3d9021bb;
        auVar1307._28_4_ = 0x3d9021bb;
        auVar305._8_4_ = 0xbdebd1b8;
        auVar305._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar305._12_4_ = 0xbdebd1b8;
        auVar305._16_4_ = 0xbdebd1b8;
        auVar305._20_4_ = 0xbdebd1b8;
        auVar305._24_4_ = 0xbdebd1b8;
        auVar305._28_4_ = 0xbdebd1b8;
        auVar671 = vfmadd213ps_avx512vl(auVar1307,auVar650,auVar305);
        auVar306._8_4_ = 0x3def251a;
        auVar306._0_8_ = 0x3def251a3def251a;
        auVar306._12_4_ = 0x3def251a;
        auVar306._16_4_ = 0x3def251a;
        auVar306._20_4_ = 0x3def251a;
        auVar306._24_4_ = 0x3def251a;
        auVar306._28_4_ = 0x3def251a;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar650,auVar306);
        auVar307._8_4_ = 0xbdfe5d4f;
        auVar307._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar307._12_4_ = 0xbdfe5d4f;
        auVar307._16_4_ = 0xbdfe5d4f;
        auVar307._20_4_ = 0xbdfe5d4f;
        auVar307._24_4_ = 0xbdfe5d4f;
        auVar307._28_4_ = 0xbdfe5d4f;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar650,auVar307);
        auVar308._8_4_ = 0x3e11e9bf;
        auVar308._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar308._12_4_ = 0x3e11e9bf;
        auVar308._16_4_ = 0x3e11e9bf;
        auVar308._20_4_ = 0x3e11e9bf;
        auVar308._24_4_ = 0x3e11e9bf;
        auVar308._28_4_ = 0x3e11e9bf;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar650,auVar308);
        auVar309._8_4_ = 0xbe2aae50;
        auVar309._0_8_ = 0xbe2aae50be2aae50;
        auVar309._12_4_ = 0xbe2aae50;
        auVar309._16_4_ = 0xbe2aae50;
        auVar309._20_4_ = 0xbe2aae50;
        auVar309._24_4_ = 0xbe2aae50;
        auVar309._28_4_ = 0xbe2aae50;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar650,auVar309);
        auVar310._8_4_ = 0x3e4cceac;
        auVar310._0_8_ = 0x3e4cceac3e4cceac;
        auVar310._12_4_ = 0x3e4cceac;
        auVar310._16_4_ = 0x3e4cceac;
        auVar310._20_4_ = 0x3e4cceac;
        auVar310._24_4_ = 0x3e4cceac;
        auVar310._28_4_ = 0x3e4cceac;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar650,auVar310);
        auVar311._8_4_ = 0xbe7ffffc;
        auVar311._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar311._12_4_ = 0xbe7ffffc;
        auVar311._16_4_ = 0xbe7ffffc;
        auVar311._20_4_ = 0xbe7ffffc;
        auVar311._24_4_ = 0xbe7ffffc;
        auVar311._28_4_ = 0xbe7ffffc;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar650,auVar311);
        auVar312._8_4_ = 0x3eaaaaaa;
        auVar312._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar312._12_4_ = 0x3eaaaaaa;
        auVar312._16_4_ = 0x3eaaaaaa;
        auVar312._20_4_ = 0x3eaaaaaa;
        auVar312._24_4_ = 0x3eaaaaaa;
        auVar312._28_4_ = 0x3eaaaaaa;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar650,auVar312);
        auVar383._4_4_ = auVar650._4_4_ * auVar650._4_4_ * auVar650._4_4_ * auVar671._4_4_;
        auVar383._0_4_ = auVar650._0_4_ * auVar650._0_4_ * auVar650._0_4_ * auVar671._0_4_;
        auVar383._8_4_ = auVar650._8_4_ * auVar650._8_4_ * auVar650._8_4_ * auVar671._8_4_;
        auVar383._12_4_ = auVar650._12_4_ * auVar650._12_4_ * auVar650._12_4_ * auVar671._12_4_;
        auVar383._16_4_ = auVar650._16_4_ * auVar650._16_4_ * auVar650._16_4_ * auVar671._16_4_;
        auVar383._20_4_ = auVar650._20_4_ * auVar650._20_4_ * auVar650._20_4_ * auVar671._20_4_;
        auVar383._24_4_ = auVar650._24_4_ * auVar650._24_4_ * auVar650._24_4_ * auVar671._24_4_;
        auVar383._28_4_ = auVar671._28_4_;
        auVar313._8_4_ = 0xb95e8083;
        auVar313._0_8_ = 0xb95e8083b95e8083;
        auVar313._12_4_ = 0xb95e8083;
        auVar313._16_4_ = 0xb95e8083;
        auVar313._20_4_ = 0xb95e8083;
        auVar313._24_4_ = 0xb95e8083;
        auVar313._28_4_ = 0xb95e8083;
        auVar671 = vfmadd231ps_avx512vl(auVar383,auVar649,auVar313);
        uVar46 = vcmpps_avx512vl(auVar911,SUB6432(ZEXT1664((undefined1  [16])0x0),0),2);
        auVar314._8_4_ = 0x3f000000;
        auVar314._0_8_ = 0x3f0000003f000000;
        auVar314._12_4_ = 0x3f000000;
        auVar314._16_4_ = 0x3f000000;
        auVar314._20_4_ = 0x3f000000;
        auVar314._24_4_ = 0x3f000000;
        auVar314._28_4_ = 0x3f000000;
        auVar671 = vfmsub231ps_avx512vl(auVar671,auVar382,auVar314);
        auVar671 = vsubps_avx(auVar671,auVar650);
        auVar315._8_4_ = 0x3f318000;
        auVar315._0_8_ = 0x3f3180003f318000;
        auVar315._12_4_ = 0x3f318000;
        auVar315._16_4_ = 0x3f318000;
        auVar315._20_4_ = 0x3f318000;
        auVar315._24_4_ = 0x3f318000;
        auVar315._28_4_ = 0x3f318000;
        auVar672 = vfmsub231ps_avx512vl(auVar671,auVar649,auVar315);
        auVar671 = vpcmpeqd_avx2(auVar382,auVar382);
        bVar11 = (bool)((byte)uVar46 & 1);
        bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar1127._8_4_ = 0x42b0c0a5;
        auVar1127._0_8_ = 0x42b0c0a542b0c0a5;
        auVar1127._12_4_ = 0x42b0c0a5;
        auVar1127._16_4_ = 0x42b0c0a5;
        auVar1127._20_4_ = 0x42b0c0a5;
        auVar1127._24_4_ = 0x42b0c0a5;
        auVar1127._28_4_ = 0x42b0c0a5;
        auVar1186._8_4_ = 0xc2b0c0a5;
        auVar1186._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1186._12_4_ = 0xc2b0c0a5;
        auVar1186._16_4_ = 0xc2b0c0a5;
        auVar1186._20_4_ = 0xc2b0c0a5;
        auVar1186._24_4_ = 0xc2b0c0a5;
        auVar1186._28_4_ = 0xc2b0c0a5;
        auVar1249._8_4_ = 0x3f000000;
        auVar1249._0_8_ = 0x3f0000003f000000;
        auVar1249._12_4_ = 0x3f000000;
        auVar1249._16_4_ = 0x3f000000;
        auVar1249._20_4_ = 0x3f000000;
        auVar1249._24_4_ = 0x3f000000;
        auVar1249._28_4_ = 0x3f000000;
        auVar1308._8_4_ = 0x3fb8aa3b;
        auVar1308._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar1308._12_4_ = 0x3fb8aa3b;
        auVar1308._16_4_ = 0x3fb8aa3b;
        auVar1308._20_4_ = 0x3fb8aa3b;
        auVar1308._24_4_ = 0x3fb8aa3b;
        auVar1308._28_4_ = 0x3fb8aa3b;
        auVar1364._8_4_ = 0x3f318000;
        auVar1364._0_8_ = 0x3f3180003f318000;
        auVar1364._12_4_ = 0x3f318000;
        auVar1364._16_4_ = 0x3f318000;
        auVar1364._20_4_ = 0x3f318000;
        auVar1364._24_4_ = 0x3f318000;
        auVar1364._28_4_ = 0x3f318000;
        auVar1421._8_4_ = 0x395e8083;
        auVar1421._0_8_ = 0x395e8083395e8083;
        auVar1421._12_4_ = 0x395e8083;
        auVar1421._16_4_ = 0x395e8083;
        auVar1421._20_4_ = 0x395e8083;
        auVar1421._24_4_ = 0x395e8083;
        auVar1421._28_4_ = 0x395e8083;
        auVar1475._8_4_ = 0x39506967;
        auVar1475._0_8_ = 0x3950696739506967;
        auVar1475._12_4_ = 0x39506967;
        auVar1475._16_4_ = 0x39506967;
        auVar1475._20_4_ = 0x39506967;
        auVar1475._24_4_ = 0x39506967;
        auVar1475._28_4_ = 0x39506967;
        auVar1529._8_4_ = 0x3ab743ce;
        auVar1529._0_8_ = 0x3ab743ce3ab743ce;
        auVar1529._12_4_ = 0x3ab743ce;
        auVar1529._16_4_ = 0x3ab743ce;
        auVar1529._20_4_ = 0x3ab743ce;
        auVar1529._24_4_ = 0x3ab743ce;
        auVar1529._28_4_ = 0x3ab743ce;
        auVar1583._8_4_ = 0x3c088908;
        auVar1583._0_8_ = 0x3c0889083c088908;
        auVar1583._12_4_ = 0x3c088908;
        auVar1583._16_4_ = 0x3c088908;
        auVar1583._20_4_ = 0x3c088908;
        auVar1583._24_4_ = 0x3c088908;
        auVar1583._28_4_ = 0x3c088908;
        auVar1637._8_4_ = 0x3d2aa9c1;
        auVar1637._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar1637._12_4_ = 0x3d2aa9c1;
        auVar1637._16_4_ = 0x3d2aa9c1;
        auVar1637._20_4_ = 0x3d2aa9c1;
        auVar1637._24_4_ = 0x3d2aa9c1;
        auVar1637._28_4_ = 0x3d2aa9c1;
        auVar1691._8_4_ = 0x3e2aaaaa;
        auVar1691._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar1691._12_4_ = 0x3e2aaaaa;
        auVar1691._16_4_ = 0x3e2aaaaa;
        auVar1691._20_4_ = 0x3e2aaaaa;
        auVar1691._24_4_ = 0x3e2aaaaa;
        auVar1691._28_4_ = 0x3e2aaaaa;
        auVar1742._8_4_ = 0x3f800000;
        auVar1742._0_8_ = 0x3f8000003f800000;
        auVar1742._12_4_ = 0x3f800000;
        auVar1742._16_4_ = 0x3f800000;
        auVar1742._20_4_ = 0x3f800000;
        auVar1742._24_4_ = 0x3f800000;
        auVar1742._28_4_ = 0x3f800000;
        uVar872 = uVar424;
        do {
          auVar559._0_4_ = *ptr1;
          auVar492 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar675 = vinsertf32x4_avx512vl
                               (ZEXT1632(CONCAT412(auVar559._0_4_,
                                                   CONCAT48(auVar559._0_4_,
                                                            CONCAT44(auVar559._0_4_,auVar559._0_4_))
                                                  )),auVar492,1);
          auVar384._4_4_ =
               auVar675._4_4_ *
               (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar672._4_4_);
          auVar384._0_4_ =
               auVar675._0_4_ *
               (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar672._0_4_);
          auVar384._8_4_ =
               auVar675._8_4_ *
               (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar672._8_4_);
          auVar384._12_4_ =
               auVar675._12_4_ *
               (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar672._12_4_);
          auVar384._16_4_ =
               auVar675._16_4_ *
               (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar672._16_4_);
          auVar384._20_4_ =
               auVar675._20_4_ *
               (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar672._20_4_);
          auVar384._24_4_ =
               auVar675._24_4_ *
               (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar672._24_4_);
          auVar384._28_4_ = auVar675._28_4_;
          auVar675 = vminps_avx(auVar384,auVar1127);
          auVar675 = vmaxps_avx(auVar675,auVar1186);
          auVar684 = vfmadd231ps_avx512vl(auVar1249,auVar675,auVar1308);
          auVar676 = vrndscaleps_avx512vl(auVar684,1);
          uVar46 = vcmpps_avx512vl(auVar684,auVar676,1);
          auVar684 = vaddps_avx512vl(auVar676,auVar999);
          bVar18 = (bool)((byte)uVar46 & 1);
          auVar651._0_4_ = (uint)bVar18 * auVar684._0_4_ | (uint)!bVar18 * auVar676._0_4_;
          bVar18 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar651._4_4_ = (uint)bVar18 * auVar684._4_4_ | (uint)!bVar18 * auVar676._4_4_;
          bVar18 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar651._8_4_ = (uint)bVar18 * auVar684._8_4_ | (uint)!bVar18 * auVar676._8_4_;
          bVar18 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar651._12_4_ = (uint)bVar18 * auVar684._12_4_ | (uint)!bVar18 * auVar676._12_4_;
          bVar18 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar651._16_4_ = (uint)bVar18 * auVar684._16_4_ | (uint)!bVar18 * auVar676._16_4_;
          bVar18 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar651._20_4_ = (uint)bVar18 * auVar684._20_4_ | (uint)!bVar18 * auVar676._20_4_;
          bVar18 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar651._24_4_ = (uint)bVar18 * auVar684._24_4_ | (uint)!bVar18 * auVar676._24_4_;
          bVar18 = SUB81(uVar46 >> 7,0);
          auVar651._28_4_ = (uint)bVar18 * auVar684._28_4_ | (uint)!bVar18 * auVar676._28_4_;
          auVar675 = vfmsub231ps_avx512vl(auVar675,auVar651,auVar1364);
          auVar675 = vfmsub231ps_avx512vl(auVar675,auVar651,auVar1421);
          auVar684 = vfmadd213ps_avx512vl(auVar1475,auVar675,auVar1529);
          auVar676 = vmulps_avx512vl(auVar675,auVar675);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1583);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1637);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1691);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1249);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar676,auVar675);
          auVar675 = vcvttps2dq_avx512vl(auVar651);
          auVar675 = vpslld_avx2(auVar675,0x17);
          auVar675 = vpaddd_avx2(auVar675,auVar1742);
          auVar675 = vfmadd213ps_avx512vl(auVar675,auVar684,auVar675);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar675;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar424 = uVar872 + 2;
          iVar421 = uVar872 + 3;
          uVar872 = uVar424;
        } while (iVar421 < (int)uVar422);
      }
      if ((int)uVar422 <= (int)uVar424) {
        return;
      }
      auVar143._8_4_ = 0x800000;
      auVar143._0_8_ = 0x80000000800000;
      auVar143._12_4_ = 0x800000;
      auVar492 = vmaxps_avx512vl(auVar462,auVar143);
      auVar1036._8_4_ = 0x3f000000;
      auVar1036._0_8_ = 0x3f0000003f000000;
      auVar1036._12_4_ = 0x3f000000;
      auVar144._8_4_ = 0x807fffff;
      auVar144._0_8_ = 0x807fffff807fffff;
      auVar144._12_4_ = 0x807fffff;
      auVar493 = vpternlogd_avx512vl(auVar1036,auVar492,auVar144,0xf8);
      auVar492 = vpsrld_avx(auVar492,0x17);
      auVar145._8_4_ = 0xffffff82;
      auVar145._0_8_ = 0xffffff82ffffff82;
      auVar145._12_4_ = 0xffffff82;
      auVar492 = vpaddd_avx512vl(auVar492,auVar145);
      auVar492 = vcvtdq2ps_avx(auVar492);
      auVar146._8_4_ = 0x3f3504f3;
      auVar146._0_8_ = 0x3f3504f33f3504f3;
      auVar146._12_4_ = 0x3f3504f3;
      uVar46 = vcmpps_avx512vl(auVar493,auVar146,1);
      auVar956._8_4_ = 0xbf800000;
      auVar956._0_8_ = 0xbf800000bf800000;
      auVar956._12_4_ = 0xbf800000;
      auVar1168._0_4_ = auVar493._0_4_ + -1.0;
      auVar1168._4_4_ = auVar493._4_4_ + -1.0;
      auVar1168._8_4_ = auVar493._8_4_ + -1.0;
      auVar1168._12_4_ = auVar493._12_4_ + -1.0;
      auVar516 = vaddps_avx512vl(auVar492,auVar956);
      bVar11 = (bool)((byte)uVar46 & 1);
      auVar543._0_4_ = (uint)bVar11 * auVar516._0_4_ | (uint)!bVar11 * auVar492._0_4_;
      bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
      auVar543._4_4_ = (uint)bVar11 * auVar516._4_4_ | (uint)!bVar11 * auVar492._4_4_;
      bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
      auVar543._8_4_ = (uint)bVar11 * auVar516._8_4_ | (uint)!bVar11 * auVar492._8_4_;
      bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar543._12_4_ = (uint)bVar11 * auVar516._12_4_ | (uint)!bVar11 * auVar492._12_4_;
      auVar492 = vaddps_avx512vl(auVar1168,auVar493);
      bVar11 = (bool)((byte)uVar46 & 1);
      auVar544._0_4_ = (float)((uint)bVar11 * auVar492._0_4_ | (uint)!bVar11 * (int)auVar1168._0_4_)
      ;
      bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
      auVar544._4_4_ = (float)((uint)bVar11 * auVar492._4_4_ | (uint)!bVar11 * (int)auVar1168._4_4_)
      ;
      bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
      auVar544._8_4_ = (float)((uint)bVar11 * auVar492._8_4_ | (uint)!bVar11 * (int)auVar1168._8_4_)
      ;
      bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar544._12_4_ =
           (float)((uint)bVar11 * auVar492._12_4_ | (uint)!bVar11 * (int)auVar1168._12_4_);
      auVar1037._0_4_ = auVar544._0_4_ * auVar544._0_4_;
      auVar1037._4_4_ = auVar544._4_4_ * auVar544._4_4_;
      auVar1037._8_4_ = auVar544._8_4_ * auVar544._8_4_;
      auVar1037._12_4_ = auVar544._12_4_ * auVar544._12_4_;
      auVar1222._8_4_ = 0x3d9021bb;
      auVar1222._0_8_ = 0x3d9021bb3d9021bb;
      auVar1222._12_4_ = 0x3d9021bb;
      auVar147._8_4_ = 0xbdebd1b8;
      auVar147._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar147._12_4_ = 0xbdebd1b8;
      auVar492 = vfmadd213ps_avx512vl(auVar1222,auVar544,auVar147);
      auVar148._8_4_ = 0x3def251a;
      auVar148._0_8_ = 0x3def251a3def251a;
      auVar148._12_4_ = 0x3def251a;
      auVar492 = vfmadd213ps_avx512vl(auVar492,auVar544,auVar148);
      auVar149._8_4_ = 0xbdfe5d4f;
      auVar149._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar149._12_4_ = 0xbdfe5d4f;
      auVar492 = vfmadd213ps_avx512vl(auVar492,auVar544,auVar149);
      auVar150._8_4_ = 0x3e11e9bf;
      auVar150._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar150._12_4_ = 0x3e11e9bf;
      auVar492 = vfmadd213ps_avx512vl(auVar492,auVar544,auVar150);
      auVar151._8_4_ = 0xbe2aae50;
      auVar151._0_8_ = 0xbe2aae50be2aae50;
      auVar151._12_4_ = 0xbe2aae50;
      auVar492 = vfmadd213ps_avx512vl(auVar492,auVar544,auVar151);
      auVar152._8_4_ = 0x3e4cceac;
      auVar152._0_8_ = 0x3e4cceac3e4cceac;
      auVar152._12_4_ = 0x3e4cceac;
      auVar492 = vfmadd213ps_avx512vl(auVar492,auVar544,auVar152);
      auVar153._8_4_ = 0xbe7ffffc;
      auVar153._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar153._12_4_ = 0xbe7ffffc;
      auVar492 = vfmadd213ps_avx512vl(auVar492,auVar544,auVar153);
      auVar154._8_4_ = 0x3eaaaaaa;
      auVar154._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar154._12_4_ = 0x3eaaaaaa;
      auVar492 = vfmadd213ps_avx512vl(auVar492,auVar544,auVar154);
      auVar1223._0_4_ = auVar1037._0_4_ * auVar544._0_4_ * auVar492._0_4_;
      auVar1223._4_4_ = auVar1037._4_4_ * auVar544._4_4_ * auVar492._4_4_;
      auVar1223._8_4_ = auVar1037._8_4_ * auVar544._8_4_ * auVar492._8_4_;
      auVar1223._12_4_ = auVar1037._12_4_ * auVar544._12_4_ * auVar492._12_4_;
      auVar155._8_4_ = 0xb95e8083;
      auVar155._0_8_ = 0xb95e8083b95e8083;
      auVar155._12_4_ = 0xb95e8083;
      auVar492 = vfmadd231ps_avx512vl(auVar1223,auVar543,auVar155);
      auVar156._8_4_ = 0x3f000000;
      auVar156._0_8_ = 0x3f0000003f000000;
      auVar156._12_4_ = 0x3f000000;
      auVar492 = vfmsub231ps_avx512vl(auVar492,auVar1037,auVar156);
      auVar492 = vsubps_avx(auVar492,auVar544);
      auVar157._8_4_ = 0x3f318000;
      auVar157._0_8_ = 0x3f3180003f318000;
      auVar157._12_4_ = 0x3f318000;
      auVar492 = vfmsub231ps_avx512vl(auVar492,auVar543,auVar157);
      uVar46 = vcmpps_avx512vl(auVar462,ZEXT416(0) << 0x20,2);
      auVar462 = vpcmpeqd_avx(auVar462,auVar462);
      bVar11 = (bool)((byte)uVar46 & 1);
      auVar545._0_4_ = (uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar492._0_4_;
      bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
      auVar545._4_4_ = (uint)bVar11 * auVar462._4_4_ | (uint)!bVar11 * auVar492._4_4_;
      bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
      auVar545._8_4_ = (uint)bVar11 * auVar462._8_4_ | (uint)!bVar11 * auVar492._8_4_;
      bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar545._12_4_ = (uint)bVar11 * auVar462._12_4_ | (uint)!bVar11 * auVar492._12_4_;
      lVar425 = 0;
      auVar894._8_4_ = 0x42b0c0a5;
      auVar894._0_8_ = 0x42b0c0a542b0c0a5;
      auVar894._12_4_ = 0x42b0c0a5;
      auVar1112._8_4_ = 0xc2b0c0a5;
      auVar1112._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar1112._12_4_ = 0xc2b0c0a5;
      auVar1169._8_4_ = 0x3f000000;
      auVar1169._0_8_ = 0x3f0000003f000000;
      auVar1169._12_4_ = 0x3f000000;
      auVar1224._8_4_ = 0x3fb8aa3b;
      auVar1224._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar1224._12_4_ = 0x3fb8aa3b;
      auVar1286._8_4_ = 0x3f318000;
      auVar1286._0_8_ = 0x3f3180003f318000;
      auVar1286._12_4_ = 0x3f318000;
      auVar1345._8_4_ = 0x395e8083;
      auVar1345._0_8_ = 0x395e8083395e8083;
      auVar1345._12_4_ = 0x395e8083;
      auVar1401._8_4_ = 0x39506967;
      auVar1401._0_8_ = 0x3950696739506967;
      auVar1401._12_4_ = 0x39506967;
      auVar1455._8_4_ = 0x3ab743ce;
      auVar1455._0_8_ = 0x3ab743ce3ab743ce;
      auVar1455._12_4_ = 0x3ab743ce;
      auVar1509._8_4_ = 0x3c088908;
      auVar1509._0_8_ = 0x3c0889083c088908;
      auVar1509._12_4_ = 0x3c088908;
      auVar1563._8_4_ = 0x3d2aa9c1;
      auVar1563._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar1563._12_4_ = 0x3d2aa9c1;
      auVar1617._8_4_ = 0x3e2aaaaa;
      auVar1617._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar1617._12_4_ = 0x3e2aaaaa;
      auVar1671._8_4_ = 0x3f800000;
      auVar1671._0_8_ = 0x3f8000003f800000;
      auVar1671._12_4_ = 0x3f800000;
      do {
        auVar559._0_4_ = ptr1[lVar425];
        auVar158._4_4_ = auVar559._0_4_;
        auVar158._0_4_ = auVar559._0_4_;
        auVar158._8_4_ = auVar559._0_4_;
        auVar158._12_4_ = auVar559._0_4_;
        auVar462 = vmulps_avx512vl(auVar545,auVar158);
        auVar462 = vminps_avx(auVar462,auVar894);
        auVar462 = vmaxps_avx(auVar462,auVar1112);
        auVar492 = vfmadd231ps_fma(auVar1169,auVar462,auVar1224);
        auVar493 = vcvttps2dq_avx512vl(auVar492);
        auVar493 = vcvtdq2ps_avx512vl(auVar493);
        uVar46 = vcmpps_avx512vl(auVar492,auVar493,1);
        auVar492 = vaddps_avx512vl(auVar493,auVar956);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar546._0_4_ = (uint)bVar11 * auVar492._0_4_ | (uint)!bVar11 * auVar493._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar546._4_4_ = (uint)bVar11 * auVar492._4_4_ | (uint)!bVar11 * auVar493._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar546._8_4_ = (uint)bVar11 * auVar492._8_4_ | (uint)!bVar11 * auVar493._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar546._12_4_ = (uint)bVar11 * auVar492._12_4_ | (uint)!bVar11 * auVar493._12_4_;
        auVar462 = vfmsub231ps_avx512vl(auVar462,auVar546,auVar1286);
        auVar492 = vfmsub231ps_avx512vl(auVar462,auVar546,auVar1345);
        auVar462 = vfmadd213ps_fma(auVar1401,auVar492,auVar1455);
        auVar462 = vfmadd213ps_fma(auVar462,auVar492,auVar1509);
        auVar493 = vmulps_avx512vl(auVar492,auVar492);
        auVar462 = vfmadd213ps_fma(auVar462,auVar492,auVar1563);
        auVar462 = vfmadd213ps_fma(auVar462,auVar492,auVar1617);
        auVar462 = vfmadd213ps_fma(auVar462,auVar492,auVar1169);
        auVar492 = vfmadd213ps_avx512vl(auVar462,auVar493,auVar492);
        auVar462 = vcvttps2dq_avx512vl(auVar546);
        auVar462 = vpslld_avx(auVar462,0x17);
        auVar462 = vpaddd_avx(auVar462,auVar1671);
        auVar462 = vfmadd213ps_fma(auVar462,auVar492,auVar462);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        lVar425 = lVar425 + 1;
      } while (uVar422 - uVar424 != (int)lVar425);
      return;
    }
    if (aw == bw) {
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        in_ZMM3 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar730 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar713 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar714 = vpxord_avx512f(in_ZMM3,auVar712);
        auVar715 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar716 = vpxord_avx512f(auVar715,auVar712);
        auVar712 = vpxord_avx512f(auVar713,auVar712);
        iVar421 = 0xf;
        auVar462 = vxorps_avx512vl(auVar504,auVar504);
        auVar717 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
        do {
          auVar718 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,(undefined1  [64])_ps512_min_norm_pos)
          ;
          auVar719 = vpsrld_avx512f(auVar718,0x17);
          auVar718 = vpternlogd_avx512f(auVar718,in_ZMM3,(undefined1  [64])_ps512_inv_mant_mask,0xec
                                       );
          uVar46 = vcmpps_avx512f(auVar718,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar720 = vsubps_avx512f(auVar718,(undefined1  [64])afVar404);
          auVar718 = vaddps_avx512f(auVar720,auVar718);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar737._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar720._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar737._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar720._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar737._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar720._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar737._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar720._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar737._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar720._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar737._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar720._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar737._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar720._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar737._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar720._28_4_;
          bVar28 = (byte)(uVar46 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar737._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar720._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar737._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar720._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar737._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar720._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar737._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar720._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar737._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar720._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar737._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar720._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar737._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar720._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar737._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar720._60_4_;
          auVar718 = vfmadd132ps_avx512f(auVar737,(undefined1  [64])afVar413,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar737,(undefined1  [64])afVar414);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar737,(undefined1  [64])afVar415);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar737,(undefined1  [64])afVar416);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar737,(undefined1  [64])afVar417);
          auVar720 = vmulps_avx512f(auVar737,auVar737);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar737,(undefined1  [64])afVar418);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar737,(undefined1  [64])afVar419);
          auVar721 = vmulps_avx512f(auVar720,auVar737);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar737,(undefined1  [64])afVar420);
          auVar718 = vfmadd213ps_avx512f(auVar721,auVar718,auVar737);
          auVar719 = vpsubd_avx512f(auVar719,auVar730);
          auVar719 = vcvtdq2ps_avx512f(auVar719);
          auVar721 = vaddps_avx512f(auVar719,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar738._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar721._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar738._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar721._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar738._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar721._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar738._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar721._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar738._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar721._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar738._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar721._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar738._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar721._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar738._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar721._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar738._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar721._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar738._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar721._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar738._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar721._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar738._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar721._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar738._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar721._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar738._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar721._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar738._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar721._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar738._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar721._60_4_;
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar738,auVar713);
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar714,auVar720);
          uVar46 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar462),2);
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar715,auVar738);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar739._0_4_ = (uint)bVar11 * auVar717._0_4_ | (uint)!bVar11 * auVar718._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar739._4_4_ = (uint)bVar11 * auVar717._4_4_ | (uint)!bVar11 * auVar718._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar739._8_4_ = (uint)bVar11 * auVar717._8_4_ | (uint)!bVar11 * auVar718._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar739._12_4_ = (uint)bVar11 * auVar717._12_4_ | (uint)!bVar11 * auVar718._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar739._16_4_ = (uint)bVar11 * auVar717._16_4_ | (uint)!bVar11 * auVar718._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar739._20_4_ = (uint)bVar11 * auVar717._20_4_ | (uint)!bVar11 * auVar718._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar739._24_4_ = (uint)bVar11 * auVar717._24_4_ | (uint)!bVar11 * auVar718._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar739._28_4_ = (uint)bVar11 * auVar717._28_4_ | (uint)!bVar11 * auVar718._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar739._32_4_ = (uint)bVar11 * auVar717._32_4_ | (uint)!bVar11 * auVar718._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar739._36_4_ = (uint)bVar11 * auVar717._36_4_ | (uint)!bVar11 * auVar718._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar739._40_4_ = (uint)bVar11 * auVar717._40_4_ | (uint)!bVar11 * auVar718._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar739._44_4_ = (uint)bVar11 * auVar717._44_4_ | (uint)!bVar11 * auVar718._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar739._48_4_ = (uint)bVar11 * auVar717._48_4_ | (uint)!bVar11 * auVar718._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar739._52_4_ = (uint)bVar11 * auVar717._52_4_ | (uint)!bVar11 * auVar718._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar739._56_4_ = (uint)bVar11 * auVar717._56_4_ | (uint)!bVar11 * auVar718._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar739._60_4_ = (uint)bVar11 * auVar717._60_4_ | (uint)!bVar11 * auVar718._60_4_;
          auVar718 = vmulps_avx512f(auVar739,*(undefined1 (*) [64])ptr1);
          auVar718 = vminps_avx512f(auVar718,(undefined1  [64])afVar405);
          auVar718 = vmaxps_avx512f(auVar718,(undefined1  [64])afVar406);
          auVar719 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar718,in_ZMM3);
          auVar720 = vrndscaleps_avx512f(auVar719,1);
          uVar46 = vcmpps_avx512f(auVar719,auVar720,1);
          auVar719 = vsubps_avx512f(auVar720,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar740._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar720._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar740._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar720._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar740._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar720._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar740._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar720._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar740._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar720._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar740._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar720._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar740._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar720._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar740._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar720._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar740._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar720._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar740._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar720._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar740._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar720._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar740._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar720._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar740._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar720._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar740._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar720._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar740._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar720._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar740._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar720._60_4_;
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar740,auVar716);
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar740,auVar712);
          auVar719 = vfmadd213ps_avx512f(auVar718,(undefined1  [64])afVar408,
                                         (undefined1  [64])afVar409);
          auVar720 = vmulps_avx512f(auVar718,auVar718);
          auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar410);
          auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar411);
          auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar412);
          auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,in_ZMM3);
          auVar718 = vfmadd213ps_avx512f(auVar719,auVar720,auVar718);
          auVar718 = vaddps_avx512f(auVar718,(undefined1  [64])afVar404);
          auVar719 = vcvttps2dq_avx512f(auVar740);
          auVar719 = vpaddd_avx512f(auVar719,auVar730);
          in_ZMM2 = vpslld_avx512f(auVar719,0x17);
          auVar718 = vmulps_avx512f(auVar718,in_ZMM2);
          *(undefined1 (*) [64])outptr = auVar718;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
        auVar462 = auVar493;
        auVar671 = auVar675;
      }
      auVar492 = auVar671._0_16_;
      if ((int)(uVar422 | 7) < (int)uVar424) {
        auVar1172._8_4_ = 0x3f3504f3;
        auVar1172._0_8_ = 0x3f3504f33f3504f3;
        auVar1172._12_4_ = 0x3f3504f3;
        auVar1172._16_4_ = 0x3f3504f3;
        auVar1172._20_4_ = 0x3f3504f3;
        auVar1172._24_4_ = 0x3f3504f3;
        auVar1172._28_4_ = 0x3f3504f3;
        auVar1227._8_4_ = 0xbf800000;
        auVar1227._0_8_ = 0xbf800000bf800000;
        auVar1227._12_4_ = 0xbf800000;
        auVar1227._16_4_ = 0xbf800000;
        auVar1227._20_4_ = 0xbf800000;
        auVar1227._24_4_ = 0xbf800000;
        auVar1227._28_4_ = 0xbf800000;
        auVar1289._8_4_ = 0x3f800000;
        auVar1289._0_8_ = 0x3f8000003f800000;
        auVar1289._12_4_ = 0x3f800000;
        auVar1289._16_4_ = 0x3f800000;
        auVar1289._20_4_ = 0x3f800000;
        auVar1289._24_4_ = 0x3f800000;
        auVar1289._28_4_ = 0x3f800000;
        auVar1348._8_4_ = 0x3d9021bb;
        auVar1348._0_8_ = 0x3d9021bb3d9021bb;
        auVar1348._12_4_ = 0x3d9021bb;
        auVar1348._16_4_ = 0x3d9021bb;
        auVar1348._20_4_ = 0x3d9021bb;
        auVar1348._24_4_ = 0x3d9021bb;
        auVar1348._28_4_ = 0x3d9021bb;
        auVar1404._8_4_ = 0xbdebd1b8;
        auVar1404._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1404._12_4_ = 0xbdebd1b8;
        auVar1404._16_4_ = 0xbdebd1b8;
        auVar1404._20_4_ = 0xbdebd1b8;
        auVar1404._24_4_ = 0xbdebd1b8;
        auVar1404._28_4_ = 0xbdebd1b8;
        auVar1458._8_4_ = 0x3def251a;
        auVar1458._0_8_ = 0x3def251a3def251a;
        auVar1458._12_4_ = 0x3def251a;
        auVar1458._16_4_ = 0x3def251a;
        auVar1458._20_4_ = 0x3def251a;
        auVar1458._24_4_ = 0x3def251a;
        auVar1458._28_4_ = 0x3def251a;
        auVar1512._8_4_ = 0xbdfe5d4f;
        auVar1512._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1512._12_4_ = 0xbdfe5d4f;
        auVar1512._16_4_ = 0xbdfe5d4f;
        auVar1512._20_4_ = 0xbdfe5d4f;
        auVar1512._24_4_ = 0xbdfe5d4f;
        auVar1512._28_4_ = 0xbdfe5d4f;
        auVar1566._8_4_ = 0x3e11e9bf;
        auVar1566._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1566._12_4_ = 0x3e11e9bf;
        auVar1566._16_4_ = 0x3e11e9bf;
        auVar1566._20_4_ = 0x3e11e9bf;
        auVar1566._24_4_ = 0x3e11e9bf;
        auVar1566._28_4_ = 0x3e11e9bf;
        auVar1620._8_4_ = 0xbe2aae50;
        auVar1620._0_8_ = 0xbe2aae50be2aae50;
        auVar1620._12_4_ = 0xbe2aae50;
        auVar1620._16_4_ = 0xbe2aae50;
        auVar1620._20_4_ = 0xbe2aae50;
        auVar1620._24_4_ = 0xbe2aae50;
        auVar1620._28_4_ = 0xbe2aae50;
        auVar1674._8_4_ = 0x3e4cceac;
        auVar1674._0_8_ = 0x3e4cceac3e4cceac;
        auVar1674._12_4_ = 0x3e4cceac;
        auVar1674._16_4_ = 0x3e4cceac;
        auVar1674._20_4_ = 0x3e4cceac;
        auVar1674._24_4_ = 0x3e4cceac;
        auVar1674._28_4_ = 0x3e4cceac;
        auVar1727._8_4_ = 0xbe7ffffc;
        auVar1727._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1727._12_4_ = 0xbe7ffffc;
        auVar1727._16_4_ = 0xbe7ffffc;
        auVar1727._20_4_ = 0xbe7ffffc;
        auVar1727._24_4_ = 0xbe7ffffc;
        auVar1727._28_4_ = 0xbe7ffffc;
        auVar1778._8_4_ = 0x3eaaaaaa;
        auVar1778._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar1778._12_4_ = 0x3eaaaaaa;
        auVar1778._16_4_ = 0x3eaaaaaa;
        auVar1778._20_4_ = 0x3eaaaaaa;
        auVar1778._24_4_ = 0x3eaaaaaa;
        auVar1778._28_4_ = 0x3eaaaaaa;
        auVar672 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar684 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar462 = vxorps_avx512vl(auVar462,auVar462);
        auVar671 = vpcmpeqd_avx2(auVar671,auVar671);
        auVar492 = auVar671._0_16_;
        auVar676 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar677 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar681 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar682 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar563 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar564 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar565 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar872 = uVar422;
        do {
          auVar254._8_4_ = 0x800000;
          auVar254._0_8_ = 0x80000000800000;
          auVar254._12_4_ = 0x800000;
          auVar254._16_4_ = 0x800000;
          auVar254._20_4_ = 0x800000;
          auVar254._24_4_ = 0x800000;
          auVar254._28_4_ = 0x800000;
          auVar566 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar254);
          auVar567 = vpsrld_avx512vl(auVar566,0x17);
          auVar960._8_4_ = 0x807fffff;
          auVar960._0_8_ = 0x807fffff807fffff;
          auVar960._12_4_ = 0x807fffff;
          auVar960._16_4_ = 0x807fffff;
          auVar960._20_4_ = 0x807fffff;
          auVar960._24_4_ = 0x807fffff;
          auVar960._28_4_ = 0x807fffff;
          auVar255._8_4_ = 0x3f000000;
          auVar255._0_8_ = 0x3f0000003f000000;
          auVar255._12_4_ = 0x3f000000;
          auVar255._16_4_ = 0x3f000000;
          auVar255._20_4_ = 0x3f000000;
          auVar255._24_4_ = 0x3f000000;
          auVar255._28_4_ = 0x3f000000;
          auVar566 = vpternlogd_avx512vl(auVar566,auVar960,auVar255,0xea);
          uVar46 = vcmpps_avx512vl(auVar566,auVar1172,1);
          auVar559 = vaddps_avx512vl(auVar566,auVar1227);
          auVar566 = vaddps_avx512vl(auVar559,auVar566);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar571._0_4_ = (float)((uint)bVar11 * auVar566._0_4_ | (uint)!bVar11 * auVar559._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar571._4_4_ = (float)((uint)bVar11 * auVar566._4_4_ | (uint)!bVar11 * auVar559._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar571._8_4_ = (float)((uint)bVar11 * auVar566._8_4_ | (uint)!bVar11 * auVar559._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar571._12_4_ =
               (float)((uint)bVar11 * auVar566._12_4_ | (uint)!bVar11 * auVar559._12_4_);
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar571._16_4_ =
               (float)((uint)bVar11 * auVar566._16_4_ | (uint)!bVar11 * auVar559._16_4_);
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar571._20_4_ =
               (float)((uint)bVar11 * auVar566._20_4_ | (uint)!bVar11 * auVar559._20_4_);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar571._24_4_ =
               (float)((uint)bVar11 * auVar566._24_4_ | (uint)!bVar11 * auVar559._24_4_);
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar571._28_4_ = (uint)bVar11 * auVar566._28_4_ | (uint)!bVar11 * auVar559._28_4_;
          auVar566 = vfmadd213ps_avx512vl(auVar1348,auVar571,auVar1404);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar571,auVar1458);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar571,auVar1512);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar571,auVar1566);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar571,auVar1620);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar571,auVar1674);
          auVar1086._0_4_ = auVar571._0_4_ * auVar571._0_4_;
          auVar1086._4_4_ = auVar571._4_4_ * auVar571._4_4_;
          auVar1086._8_4_ = auVar571._8_4_ * auVar571._8_4_;
          auVar1086._12_4_ = auVar571._12_4_ * auVar571._12_4_;
          auVar1086._16_4_ = auVar571._16_4_ * auVar571._16_4_;
          auVar1086._20_4_ = auVar571._20_4_ * auVar571._20_4_;
          auVar1086._28_36_ = in_ZMM2._28_36_;
          auVar1086._24_4_ = auVar571._24_4_ * auVar571._24_4_;
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar571,auVar1727);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar571,auVar1778);
          auVar1139._0_4_ = auVar1086._0_4_ * auVar571._0_4_;
          auVar1139._4_4_ = auVar1086._4_4_ * auVar571._4_4_;
          auVar1139._8_4_ = auVar1086._8_4_ * auVar571._8_4_;
          auVar1139._12_4_ = auVar1086._12_4_ * auVar571._12_4_;
          auVar1139._16_4_ = auVar1086._16_4_ * auVar571._16_4_;
          auVar1139._20_4_ = auVar1086._20_4_ * auVar571._20_4_;
          auVar1139._28_36_ = in_ZMM3._28_36_;
          auVar1139._24_4_ = auVar1086._24_4_ * auVar571._24_4_;
          auVar566 = vmulps_avx512vl(auVar1139._0_32_,auVar566);
          auVar256._8_4_ = 0xffffff82;
          auVar256._0_8_ = 0xffffff82ffffff82;
          auVar256._12_4_ = 0xffffff82;
          auVar256._16_4_ = 0xffffff82;
          auVar256._20_4_ = 0xffffff82;
          auVar256._24_4_ = 0xffffff82;
          auVar256._28_4_ = 0xffffff82;
          auVar567 = vpaddd_avx512vl(auVar567,auVar256);
          auVar567 = vcvtdq2ps_avx512vl(auVar567);
          auVar559 = vsubps_avx512vl(auVar567,auVar1289);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar572._0_4_ = (uint)bVar11 * auVar559._0_4_ | (uint)!bVar11 * auVar567._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar572._4_4_ = (uint)bVar11 * auVar559._4_4_ | (uint)!bVar11 * auVar567._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar572._8_4_ = (uint)bVar11 * auVar559._8_4_ | (uint)!bVar11 * auVar567._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar572._12_4_ = (uint)bVar11 * auVar559._12_4_ | (uint)!bVar11 * auVar567._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar572._16_4_ = (uint)bVar11 * auVar559._16_4_ | (uint)!bVar11 * auVar567._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar572._20_4_ = (uint)bVar11 * auVar559._20_4_ | (uint)!bVar11 * auVar567._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar572._24_4_ = (uint)bVar11 * auVar559._24_4_ | (uint)!bVar11 * auVar567._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar572._28_4_ = (uint)bVar11 * auVar559._28_4_ | (uint)!bVar11 * auVar567._28_4_;
          auVar566 = vfmadd231ps_avx512vl(auVar566,auVar572,auVar672);
          auVar566 = vfmsub231ps_avx512vl(auVar566,auVar675,auVar1086._0_32_);
          auVar566 = vsubps_avx(auVar566,auVar571);
          auVar566 = vfmsub231ps_avx512vl(auVar566,auVar684,auVar572);
          uVar46 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,
                                   ZEXT1632(auVar462),2);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
          bVar18 = SUB81(uVar46 >> 7,0);
          auVar370._4_4_ =
               (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar566._4_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          auVar370._0_4_ =
               (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar566._0_4_) *
               *(float *)*(undefined1 (*) [64])ptr1;
          auVar370._8_4_ =
               (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar566._8_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          auVar370._12_4_ =
               (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar566._12_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          auVar370._16_4_ =
               (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar566._16_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          auVar370._20_4_ =
               (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar566._20_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
          auVar370._24_4_ =
               (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar566._24_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
          auVar370._28_4_ = (uint)bVar18 * auVar671._28_4_ | (uint)!bVar18 * auVar566._28_4_;
          auVar566 = vminps_avx512vl(auVar370,auVar676);
          auVar567 = vmaxps_avx512vl(auVar566,auVar677);
          auVar559 = vfmadd231ps_avx512vl(auVar675,auVar567,auVar680);
          auVar566 = vroundps_avx(auVar559,1);
          uVar46 = vcmpps_avx512vl(auVar559,auVar566,1);
          auVar559 = vsubps_avx512vl(auVar566,auVar1289);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar573._0_4_ = (float)((uint)bVar11 * auVar559._0_4_ | (uint)!bVar11 * auVar566._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar573._4_4_ = (float)((uint)bVar11 * auVar559._4_4_ | (uint)!bVar11 * auVar566._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar573._8_4_ = (float)((uint)bVar11 * auVar559._8_4_ | (uint)!bVar11 * auVar566._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar573._12_4_ =
               (float)((uint)bVar11 * auVar559._12_4_ | (uint)!bVar11 * auVar566._12_4_);
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar573._16_4_ =
               (float)((uint)bVar11 * auVar559._16_4_ | (uint)!bVar11 * auVar566._16_4_);
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar573._20_4_ =
               (float)((uint)bVar11 * auVar559._20_4_ | (uint)!bVar11 * auVar566._20_4_);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar573._24_4_ =
               (float)((uint)bVar11 * auVar559._24_4_ | (uint)!bVar11 * auVar566._24_4_);
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar573._28_4_ =
               (float)((uint)bVar11 * auVar559._28_4_ | (uint)!bVar11 * auVar566._28_4_);
          in_ZMM3 = ZEXT3264(auVar573);
          auVar566 = vfmsub231ps_avx512vl(auVar567,auVar573,auVar684);
          auVar566 = vfnmsub231ps_avx512vl(auVar566,auVar573,auVar672);
          auVar567 = vfmadd213ps_avx512vl(auVar681,auVar566,auVar682);
          auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar562);
          auVar559 = vmulps_avx512vl(auVar566,auVar566);
          auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar563);
          auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar564);
          auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar675);
          auVar566 = vfmadd213ps_avx512vl(auVar567,auVar559,auVar566);
          in_ZMM2 = ZEXT3264(auVar566);
          auVar961._0_4_ = (int)auVar573._0_4_;
          auVar961._4_4_ = (int)auVar573._4_4_;
          auVar961._8_4_ = (int)auVar573._8_4_;
          auVar961._12_4_ = (int)auVar573._12_4_;
          auVar961._16_4_ = (int)auVar573._16_4_;
          auVar961._20_4_ = (int)auVar573._20_4_;
          auVar961._24_4_ = (int)auVar573._24_4_;
          auVar961._28_4_ = (int)auVar573._28_4_;
          auVar567 = vpslld_avx2(auVar961,0x17);
          auVar567 = vpaddd_avx512vl(auVar567,auVar565);
          auVar493 = vfmadd213ps_fma(auVar567,auVar566,auVar567);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar493);
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar422 = uVar872 + 8;
          iVar421 = uVar872 + 0xf;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if ((int)(uVar422 | 3) < (int)uVar424) {
        auVar1090._8_4_ = 0xffffff82;
        auVar1090._0_8_ = 0xffffff82ffffff82;
        auVar1090._12_4_ = 0xffffff82;
        auVar1144._8_4_ = 0x3f3504f3;
        auVar1144._0_8_ = 0x3f3504f33f3504f3;
        auVar1144._12_4_ = 0x3f3504f3;
        auVar1198._8_4_ = 0xbf800000;
        auVar1198._0_8_ = 0xbf800000bf800000;
        auVar1198._12_4_ = 0xbf800000;
        auVar1262._8_4_ = 0x3f800000;
        auVar1262._0_8_ = 0x3f8000003f800000;
        auVar1262._12_4_ = 0x3f800000;
        auVar1325._8_4_ = 0x3d9021bb;
        auVar1325._0_8_ = 0x3d9021bb3d9021bb;
        auVar1325._12_4_ = 0x3d9021bb;
        auVar1381._8_4_ = 0xbdebd1b8;
        auVar1381._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1381._12_4_ = 0xbdebd1b8;
        auVar1435._8_4_ = 0x3def251a;
        auVar1435._0_8_ = 0x3def251a3def251a;
        auVar1435._12_4_ = 0x3def251a;
        auVar1489._8_4_ = 0xbdfe5d4f;
        auVar1489._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1489._12_4_ = 0xbdfe5d4f;
        auVar1543._8_4_ = 0x3e11e9bf;
        auVar1543._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1543._12_4_ = 0x3e11e9bf;
        auVar1597._8_4_ = 0xbe2aae50;
        auVar1597._0_8_ = 0xbe2aae50be2aae50;
        auVar1597._12_4_ = 0xbe2aae50;
        auVar1651._8_4_ = 0x3e4cceac;
        auVar1651._0_8_ = 0x3e4cceac3e4cceac;
        auVar1651._12_4_ = 0x3e4cceac;
        auVar1705._8_4_ = 0xbe7ffffc;
        auVar1705._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1705._12_4_ = 0xbe7ffffc;
        auVar1758._8_4_ = 0x3eaaaaaa;
        auVar1758._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar1758._12_4_ = 0x3eaaaaaa;
        auVar493 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar516 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar496 = vxorps_avx512vl(auVar462,auVar462);
        auVar462 = vpcmpeqd_avx(auVar492,auVar492);
        auVar492 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar497 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar501 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar502 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar520 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar439 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar440 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar441 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar872 = uVar422;
        do {
          auVar116._8_4_ = 0x800000;
          auVar116._0_8_ = 0x80000000800000;
          auVar116._12_4_ = 0x800000;
          auVar442 = vmaxps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar116);
          auVar443 = vpsrld_avx512vl(auVar442,0x17);
          auVar921._8_4_ = 0x807fffff;
          auVar921._0_8_ = 0x807fffff807fffff;
          auVar921._12_4_ = 0x807fffff;
          auVar117._8_4_ = 0x3f000000;
          auVar117._0_8_ = 0x3f0000003f000000;
          auVar117._12_4_ = 0x3f000000;
          auVar442 = vpternlogd_avx512vl(auVar442,auVar921,auVar117,0xea);
          uVar46 = vcmpps_avx512vl(auVar442,auVar1144,1);
          auVar436 = vaddps_avx512vl(auVar442,auVar1198);
          auVar442 = vaddps_avx512vl(auVar436,auVar442);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar447._0_4_ = (uint)bVar11 * auVar442._0_4_ | (uint)!bVar11 * auVar436._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar447._4_4_ = (uint)bVar11 * auVar442._4_4_ | (uint)!bVar11 * auVar436._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar447._8_4_ = (uint)bVar11 * auVar442._8_4_ | (uint)!bVar11 * auVar436._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar447._12_4_ = (uint)bVar11 * auVar442._12_4_ | (uint)!bVar11 * auVar436._12_4_;
          auVar442 = vfmadd213ps_avx512vl(auVar1325,auVar447,auVar1381);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar447,auVar1435);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar447,auVar1489);
          uVar426 = vcmpps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar496,2);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar447,auVar1543);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar447,auVar1597);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar447,auVar1651);
          auVar436 = vmulps_avx512vl(auVar447,auVar447);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar447,auVar1705);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar447,auVar1758);
          auVar437 = vmulps_avx512vl(auVar436,auVar447);
          auVar442 = vmulps_avx512vl(auVar437,auVar442);
          auVar443 = vpaddd_avx512vl(auVar443,auVar1090);
          auVar443 = vcvtdq2ps_avx512vl(auVar443);
          auVar437 = vsubps_avx512vl(auVar443,auVar1262);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar448._0_4_ = (uint)bVar11 * auVar437._0_4_ | (uint)!bVar11 * auVar443._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar448._4_4_ = (uint)bVar11 * auVar437._4_4_ | (uint)!bVar11 * auVar443._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar448._8_4_ = (uint)bVar11 * auVar437._8_4_ | (uint)!bVar11 * auVar443._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar448._12_4_ = (uint)bVar11 * auVar437._12_4_ | (uint)!bVar11 * auVar443._12_4_;
          auVar442 = vfmadd231ps_avx512vl(auVar442,auVar448,auVar493);
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar516,auVar436);
          auVar442 = vsubps_avx(auVar442,auVar447);
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar504,auVar448);
          bVar11 = (bool)((byte)uVar426 & 1);
          bVar12 = (bool)((byte)(uVar426 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar426 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar922._0_4_ =
               (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar442._0_4_) *
               *(float *)*(undefined1 (*) [64])ptr1;
          auVar922._4_4_ =
               (float)((uint)bVar12 * auVar462._4_4_ | (uint)!bVar12 * auVar442._4_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          auVar922._8_4_ =
               (float)((uint)bVar13 * auVar462._8_4_ | (uint)!bVar13 * auVar442._8_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          auVar922._12_4_ =
               (float)((uint)bVar14 * auVar462._12_4_ | (uint)!bVar14 * auVar442._12_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          auVar442 = vminps_avx512vl(auVar922,auVar492);
          auVar442 = vmaxps_avx512vl(auVar442,auVar497);
          auVar443 = vfmadd231ps_avx512vl(auVar516,auVar442,auVar498);
          auVar436 = vcvttps2dq_avx512vl(auVar443);
          auVar436 = vcvtdq2ps_avx512vl(auVar436);
          uVar46 = vcmpps_avx512vl(auVar443,auVar436,1);
          auVar443 = vsubps_avx512vl(auVar436,auVar1262);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar449._0_4_ = (uint)bVar11 * auVar443._0_4_ | (uint)!bVar11 * auVar436._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar449._4_4_ = (uint)bVar11 * auVar443._4_4_ | (uint)!bVar11 * auVar436._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar449._8_4_ = (uint)bVar11 * auVar443._8_4_ | (uint)!bVar11 * auVar436._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar449._12_4_ = (uint)bVar11 * auVar443._12_4_ | (uint)!bVar11 * auVar436._12_4_;
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar449,auVar504);
          auVar442 = vfnmsub231ps_avx512vl(auVar442,auVar449,auVar493);
          auVar443 = vfmadd213ps_avx512vl(auVar501,auVar442,auVar502);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar520);
          auVar436 = vmulps_avx512vl(auVar442,auVar442);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar439);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar440);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar516);
          auVar442 = vfmadd213ps_avx512vl(auVar443,auVar436,auVar442);
          auVar443 = vcvttps2dq_avx512vl(auVar449);
          auVar443 = vpslld_avx(auVar443,0x17);
          auVar443 = vpaddd_avx512vl(auVar443,auVar441);
          auVar442 = vfmadd213ps_fma(auVar443,auVar442,auVar443);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar422 = uVar872 + 4;
          iVar421 = uVar872 + 7;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        return;
      }
      lVar425 = 0;
      do {
        auVar559._0_4_ =
             powf(*(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4),
                  *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4));
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar559._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003a2bfb;
      auVar559._0_4_ = *ptr;
      if (iVar421 == 4) {
        auVar462 = *(undefined1 (*) [16])ptr;
        auVar730 = ZEXT3264(CONCAT1616(auVar462,auVar462));
      }
      else {
        auVar462 = vpbroadcastd_avx512vl(ZEXT416((uint)auVar559._0_4_));
        if (iVar421 == 8) {
          auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          uVar880 = auVar462._0_4_;
          auVar1009._4_4_ = uVar880;
          auVar1009._0_4_ = uVar880;
          auVar1009._8_4_ = uVar880;
          auVar1009._12_4_ = uVar880;
          auVar1009._16_4_ = uVar880;
          auVar1009._20_4_ = uVar880;
          auVar1009._24_4_ = uVar880;
          auVar1009._28_4_ = uVar880;
          auVar730 = ZEXT3264(auVar1009);
          if (iVar421 == 0x10) {
            auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_003acb5e;
          }
        }
      }
      auVar1009 = auVar730._0_32_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar1009,1);
LAB_003acb5e:
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        uVar46 = vcmpps_avx512f(auVar730,ZEXT864(0),2);
        auVar730 = vmaxps_avx512f(auVar730,(undefined1  [64])_ps512_min_norm_pos);
        auVar712 = vpsrld_avx512f(auVar730,0x17);
        auVar713 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar730 = vpternlogd_avx512f(auVar730,auVar713,(undefined1  [64])_ps512_inv_mant_mask,0xec)
        ;
        auVar714 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar712 = vpsubd_avx512f(auVar712,auVar714);
        auVar712 = vcvtdq2ps_avx512f(auVar712);
        uVar426 = vcmpps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar715 = vsubps_avx512f(auVar730,(undefined1  [64])::_ps512_1);
        auVar716 = vaddps_avx512f(auVar712,(undefined1  [64])::_ps512_1);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar865._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar716._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar865._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar716._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar865._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar716._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar865._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar716._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar865._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar716._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar865._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar716._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar865._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar716._24_4_;
        bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
        auVar865._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar716._28_4_;
        bVar28 = (byte)(uVar426 >> 8);
        bVar11 = (bool)(bVar28 & 1);
        auVar865._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar716._32_4_;
        bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
        auVar865._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar716._36_4_;
        bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
        auVar865._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar716._40_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
        auVar865._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar716._44_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
        auVar865._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar716._48_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
        auVar865._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar716._52_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
        auVar865._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar716._56_4_;
        bVar11 = SUB81(uVar426 >> 0xf,0);
        auVar865._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar716._60_4_;
        auVar730 = vaddps_avx512f(auVar715,auVar730);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar866._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * auVar715._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar866._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * auVar715._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar866._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * auVar715._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar866._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * auVar715._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar866._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * auVar715._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar866._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * auVar715._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar866._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * auVar715._24_4_;
        bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
        auVar866._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * auVar715._28_4_;
        bVar11 = (bool)(bVar28 & 1);
        auVar866._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * auVar715._32_4_;
        bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
        auVar866._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * auVar715._36_4_;
        bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
        auVar866._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * auVar715._40_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
        auVar866._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * auVar715._44_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
        auVar866._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * auVar715._48_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
        auVar866._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * auVar715._52_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
        auVar866._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * auVar715._56_4_;
        bVar11 = SUB81(uVar426 >> 0xf,0);
        auVar866._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * auVar715._60_4_;
        auVar730 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar866,
                                       (undefined1  [64])_ps512_cephes_log_p1);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar866,(undefined1  [64])_ps512_cephes_log_p2);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar866,(undefined1  [64])_ps512_cephes_log_p3);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar866,(undefined1  [64])_ps512_cephes_log_p4);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar866,(undefined1  [64])_ps512_cephes_log_p5);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar866,(undefined1  [64])_ps512_cephes_log_p6);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar866,(undefined1  [64])_ps512_cephes_log_p7);
        auVar730 = vfmadd213ps_avx512f(auVar730,auVar866,(undefined1  [64])_ps512_cephes_log_p8);
        auVar712 = vmulps_avx512f(auVar866,auVar866);
        auVar715 = vmulps_avx512f(auVar712,auVar866);
        auVar730 = vmulps_avx512f(auVar715,auVar730);
        auVar730 = vfmadd231ps_avx512f(auVar730,auVar865,(undefined1  [64])_ps512_cephes_log_q1);
        auVar730 = vfmsub231ps_avx512f(auVar730,auVar713,auVar712);
        auVar730 = vsubps_avx512f(auVar730,auVar866);
        auVar730 = vfmsub231ps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_log_q2,auVar865);
        auVar712 = vpternlogd_avx512f(auVar712,auVar712,auVar712,0xff);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar867._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar730._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar867._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar730._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar867._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar730._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar867._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar730._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar867._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar730._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar867._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar730._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar867._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar730._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        auVar867._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar730._28_4_;
        bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
        auVar867._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar730._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        auVar867._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar730._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        auVar867._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar730._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        auVar867._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar730._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        auVar867._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar730._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        auVar867._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar730._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        auVar867._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar730._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        auVar867._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar730._60_4_;
        auVar730 = vbroadcastss_avx512f(ZEXT416(0x80000000));
        auVar712 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar730);
        auVar730 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar730);
        iVar421 = 0xf;
        do {
          auVar715 = vmulps_avx512f(auVar867,*(undefined1 (*) [64])ptr1);
          auVar715 = vminps_avx512f(auVar715,(undefined1  [64])afVar405);
          auVar715 = vmaxps_avx512f(auVar715,(undefined1  [64])afVar406);
          auVar716 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar715,auVar713);
          auVar717 = vrndscaleps_avx512f(auVar716,1);
          uVar46 = vcmpps_avx512f(auVar716,auVar717,1);
          auVar716 = vsubps_avx512f(auVar717,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar868._0_4_ = (uint)bVar11 * auVar716._0_4_ | (uint)!bVar11 * auVar717._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar868._4_4_ = (uint)bVar11 * auVar716._4_4_ | (uint)!bVar11 * auVar717._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar868._8_4_ = (uint)bVar11 * auVar716._8_4_ | (uint)!bVar11 * auVar717._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar868._12_4_ = (uint)bVar11 * auVar716._12_4_ | (uint)!bVar11 * auVar717._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar868._16_4_ = (uint)bVar11 * auVar716._16_4_ | (uint)!bVar11 * auVar717._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar868._20_4_ = (uint)bVar11 * auVar716._20_4_ | (uint)!bVar11 * auVar717._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar868._24_4_ = (uint)bVar11 * auVar716._24_4_ | (uint)!bVar11 * auVar717._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar868._28_4_ = (uint)bVar11 * auVar716._28_4_ | (uint)!bVar11 * auVar717._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar868._32_4_ = (uint)bVar11 * auVar716._32_4_ | (uint)!bVar11 * auVar717._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar868._36_4_ = (uint)bVar11 * auVar716._36_4_ | (uint)!bVar11 * auVar717._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar868._40_4_ = (uint)bVar11 * auVar716._40_4_ | (uint)!bVar11 * auVar717._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar868._44_4_ = (uint)bVar11 * auVar716._44_4_ | (uint)!bVar11 * auVar717._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar868._48_4_ = (uint)bVar11 * auVar716._48_4_ | (uint)!bVar11 * auVar717._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar868._52_4_ = (uint)bVar11 * auVar716._52_4_ | (uint)!bVar11 * auVar717._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar868._56_4_ = (uint)bVar11 * auVar716._56_4_ | (uint)!bVar11 * auVar717._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar868._60_4_ = (uint)bVar11 * auVar716._60_4_ | (uint)!bVar11 * auVar717._60_4_;
          auVar715 = vfmadd231ps_avx512f(auVar715,auVar868,auVar712);
          auVar715 = vfmadd231ps_avx512f(auVar715,auVar868,auVar730);
          auVar716 = vfmadd213ps_avx512f(auVar715,(undefined1  [64])afVar408,
                                         (undefined1  [64])afVar409);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar410);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar411);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar412);
          auVar717 = vmulps_avx512f(auVar715,auVar715);
          auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,auVar713);
          auVar715 = vfmadd213ps_avx512f(auVar716,auVar717,auVar715);
          auVar716 = vcvttps2dq_avx512f(auVar868);
          auVar715 = vaddps_avx512f(auVar715,(undefined1  [64])afVar404);
          auVar716 = vpaddd_avx512f(auVar716,auVar714);
          auVar716 = vpslld_avx512f(auVar716,0x17);
          auVar715 = vmulps_avx512f(auVar715,auVar716);
          *(undefined1 (*) [64])outptr = auVar715;
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
        in_ZMM15 = afVar412;
      }
      if ((int)(uVar422 | 7) < (int)uVar424) {
        auVar261._8_4_ = 0x800000;
        auVar261._0_8_ = 0x80000000800000;
        auVar261._12_4_ = 0x800000;
        auVar261._16_4_ = 0x800000;
        auVar261._20_4_ = 0x800000;
        auVar261._24_4_ = 0x800000;
        auVar261._28_4_ = 0x800000;
        auVar671 = vmaxps_avx512vl(auVar1009,auVar261);
        auVar675 = vpsrld_avx2(auVar671,0x17);
        auVar1191._8_4_ = 0x3f000000;
        auVar1191._0_8_ = 0x3f0000003f000000;
        auVar1191._12_4_ = 0x3f000000;
        auVar1191._16_4_ = 0x3f000000;
        auVar1191._20_4_ = 0x3f000000;
        auVar1191._24_4_ = 0x3f000000;
        auVar1191._28_4_ = 0x3f000000;
        auVar262._8_4_ = 0x807fffff;
        auVar262._0_8_ = 0x807fffff807fffff;
        auVar262._12_4_ = 0x807fffff;
        auVar262._16_4_ = 0x807fffff;
        auVar262._20_4_ = 0x807fffff;
        auVar262._24_4_ = 0x807fffff;
        auVar262._28_4_ = 0x807fffff;
        auVar672 = vpternlogd_avx512vl(auVar1191,auVar671,auVar262,0xf8);
        auVar263._8_4_ = 0xffffff82;
        auVar263._0_8_ = 0xffffff82ffffff82;
        auVar263._12_4_ = 0xffffff82;
        auVar263._16_4_ = 0xffffff82;
        auVar263._20_4_ = 0xffffff82;
        auVar263._24_4_ = 0xffffff82;
        auVar263._28_4_ = 0xffffff82;
        auVar671 = vpaddd_avx512vl(auVar675,auVar263);
        auVar671 = vcvtdq2ps_avx(auVar671);
        auVar264._8_4_ = 0x3f3504f3;
        auVar264._0_8_ = 0x3f3504f33f3504f3;
        auVar264._12_4_ = 0x3f3504f3;
        auVar264._16_4_ = 0x3f3504f3;
        auVar264._20_4_ = 0x3f3504f3;
        auVar264._24_4_ = 0x3f3504f3;
        auVar264._28_4_ = 0x3f3504f3;
        uVar46 = vcmpps_avx512vl(auVar672,auVar264,1);
        auVar1083._8_4_ = 0xbf800000;
        auVar1083._0_8_ = 0xbf800000bf800000;
        auVar1083._12_4_ = 0xbf800000;
        auVar1083._16_4_ = 0xbf800000;
        auVar1083._20_4_ = 0xbf800000;
        auVar1083._24_4_ = 0xbf800000;
        auVar1083._28_4_ = 0xbf800000;
        auVar1320._0_4_ = auVar672._0_4_ + -1.0;
        auVar1320._4_4_ = auVar672._4_4_ + -1.0;
        auVar1320._8_4_ = auVar672._8_4_ + -1.0;
        auVar1320._12_4_ = auVar672._12_4_ + -1.0;
        auVar1320._16_4_ = auVar672._16_4_ + -1.0;
        auVar1320._20_4_ = auVar672._20_4_ + -1.0;
        auVar1320._24_4_ = auVar672._24_4_ + -1.0;
        auVar1320._28_4_ = auVar672._28_4_ + -1.0;
        auVar675 = vaddps_avx512vl(auVar671,auVar1083);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar704._0_4_ = (uint)bVar11 * auVar675._0_4_ | (uint)!bVar11 * auVar671._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar704._4_4_ = (uint)bVar11 * auVar675._4_4_ | (uint)!bVar11 * auVar671._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar704._8_4_ = (uint)bVar11 * auVar675._8_4_ | (uint)!bVar11 * auVar671._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar704._12_4_ = (uint)bVar11 * auVar675._12_4_ | (uint)!bVar11 * auVar671._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar704._16_4_ = (uint)bVar11 * auVar675._16_4_ | (uint)!bVar11 * auVar671._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar704._20_4_ = (uint)bVar11 * auVar675._20_4_ | (uint)!bVar11 * auVar671._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar704._24_4_ = (uint)bVar11 * auVar675._24_4_ | (uint)!bVar11 * auVar671._24_4_;
        bVar11 = SUB81(uVar46 >> 7,0);
        auVar704._28_4_ = (uint)bVar11 * auVar675._28_4_ | (uint)!bVar11 * auVar671._28_4_;
        auVar671 = vaddps_avx512vl(auVar1320,auVar672);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar705._0_4_ =
             (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * (int)auVar1320._0_4_);
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar705._4_4_ =
             (float)((uint)bVar11 * auVar671._4_4_ | (uint)!bVar11 * (int)auVar1320._4_4_);
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar705._8_4_ =
             (float)((uint)bVar11 * auVar671._8_4_ | (uint)!bVar11 * (int)auVar1320._8_4_);
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar705._12_4_ =
             (float)((uint)bVar11 * auVar671._12_4_ | (uint)!bVar11 * (int)auVar1320._12_4_);
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar705._16_4_ =
             (float)((uint)bVar11 * auVar671._16_4_ | (uint)!bVar11 * (int)auVar1320._16_4_);
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar705._20_4_ =
             (float)((uint)bVar11 * auVar671._20_4_ | (uint)!bVar11 * (int)auVar1320._20_4_);
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar705._24_4_ =
             (float)((uint)bVar11 * auVar671._24_4_ | (uint)!bVar11 * (int)auVar1320._24_4_);
        bVar11 = SUB81(uVar46 >> 7,0);
        auVar705._28_4_ = (uint)bVar11 * auVar671._28_4_ | (uint)!bVar11 * (int)auVar1320._28_4_;
        auVar393._4_4_ = auVar705._4_4_ * auVar705._4_4_;
        auVar393._0_4_ = auVar705._0_4_ * auVar705._0_4_;
        auVar393._8_4_ = auVar705._8_4_ * auVar705._8_4_;
        auVar393._12_4_ = auVar705._12_4_ * auVar705._12_4_;
        auVar393._16_4_ = auVar705._16_4_ * auVar705._16_4_;
        auVar393._20_4_ = auVar705._20_4_ * auVar705._20_4_;
        auVar393._24_4_ = auVar705._24_4_ * auVar705._24_4_;
        auVar393._28_4_ = auVar672._28_4_;
        auVar1376._8_4_ = 0x3d9021bb;
        auVar1376._0_8_ = 0x3d9021bb3d9021bb;
        auVar1376._12_4_ = 0x3d9021bb;
        auVar1376._16_4_ = 0x3d9021bb;
        auVar1376._20_4_ = 0x3d9021bb;
        auVar1376._24_4_ = 0x3d9021bb;
        auVar1376._28_4_ = 0x3d9021bb;
        auVar265._8_4_ = 0xbdebd1b8;
        auVar265._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar265._12_4_ = 0xbdebd1b8;
        auVar265._16_4_ = 0xbdebd1b8;
        auVar265._20_4_ = 0xbdebd1b8;
        auVar265._24_4_ = 0xbdebd1b8;
        auVar265._28_4_ = 0xbdebd1b8;
        auVar671 = vfmadd213ps_avx512vl(auVar1376,auVar705,auVar265);
        auVar266._8_4_ = 0x3def251a;
        auVar266._0_8_ = 0x3def251a3def251a;
        auVar266._12_4_ = 0x3def251a;
        auVar266._16_4_ = 0x3def251a;
        auVar266._20_4_ = 0x3def251a;
        auVar266._24_4_ = 0x3def251a;
        auVar266._28_4_ = 0x3def251a;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar705,auVar266);
        auVar267._8_4_ = 0xbdfe5d4f;
        auVar267._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar267._12_4_ = 0xbdfe5d4f;
        auVar267._16_4_ = 0xbdfe5d4f;
        auVar267._20_4_ = 0xbdfe5d4f;
        auVar267._24_4_ = 0xbdfe5d4f;
        auVar267._28_4_ = 0xbdfe5d4f;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar705,auVar267);
        auVar268._8_4_ = 0x3e11e9bf;
        auVar268._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar268._12_4_ = 0x3e11e9bf;
        auVar268._16_4_ = 0x3e11e9bf;
        auVar268._20_4_ = 0x3e11e9bf;
        auVar268._24_4_ = 0x3e11e9bf;
        auVar268._28_4_ = 0x3e11e9bf;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar705,auVar268);
        auVar269._8_4_ = 0xbe2aae50;
        auVar269._0_8_ = 0xbe2aae50be2aae50;
        auVar269._12_4_ = 0xbe2aae50;
        auVar269._16_4_ = 0xbe2aae50;
        auVar269._20_4_ = 0xbe2aae50;
        auVar269._24_4_ = 0xbe2aae50;
        auVar269._28_4_ = 0xbe2aae50;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar705,auVar269);
        auVar270._8_4_ = 0x3e4cceac;
        auVar270._0_8_ = 0x3e4cceac3e4cceac;
        auVar270._12_4_ = 0x3e4cceac;
        auVar270._16_4_ = 0x3e4cceac;
        auVar270._20_4_ = 0x3e4cceac;
        auVar270._24_4_ = 0x3e4cceac;
        auVar270._28_4_ = 0x3e4cceac;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar705,auVar270);
        auVar271._8_4_ = 0xbe7ffffc;
        auVar271._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar271._12_4_ = 0xbe7ffffc;
        auVar271._16_4_ = 0xbe7ffffc;
        auVar271._20_4_ = 0xbe7ffffc;
        auVar271._24_4_ = 0xbe7ffffc;
        auVar271._28_4_ = 0xbe7ffffc;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar705,auVar271);
        auVar272._8_4_ = 0x3eaaaaaa;
        auVar272._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar272._12_4_ = 0x3eaaaaaa;
        auVar272._16_4_ = 0x3eaaaaaa;
        auVar272._20_4_ = 0x3eaaaaaa;
        auVar272._24_4_ = 0x3eaaaaaa;
        auVar272._28_4_ = 0x3eaaaaaa;
        auVar671 = vfmadd213ps_avx512vl(auVar671,auVar705,auVar272);
        auVar394._4_4_ = auVar705._4_4_ * auVar705._4_4_ * auVar705._4_4_ * auVar671._4_4_;
        auVar394._0_4_ = auVar705._0_4_ * auVar705._0_4_ * auVar705._0_4_ * auVar671._0_4_;
        auVar394._8_4_ = auVar705._8_4_ * auVar705._8_4_ * auVar705._8_4_ * auVar671._8_4_;
        auVar394._12_4_ = auVar705._12_4_ * auVar705._12_4_ * auVar705._12_4_ * auVar671._12_4_;
        auVar394._16_4_ = auVar705._16_4_ * auVar705._16_4_ * auVar705._16_4_ * auVar671._16_4_;
        auVar394._20_4_ = auVar705._20_4_ * auVar705._20_4_ * auVar705._20_4_ * auVar671._20_4_;
        auVar394._24_4_ = auVar705._24_4_ * auVar705._24_4_ * auVar705._24_4_ * auVar671._24_4_;
        auVar394._28_4_ = auVar671._28_4_;
        auVar273._8_4_ = 0xb95e8083;
        auVar273._0_8_ = 0xb95e8083b95e8083;
        auVar273._12_4_ = 0xb95e8083;
        auVar273._16_4_ = 0xb95e8083;
        auVar273._20_4_ = 0xb95e8083;
        auVar273._24_4_ = 0xb95e8083;
        auVar273._28_4_ = 0xb95e8083;
        auVar671 = vfmadd231ps_avx512vl(auVar394,auVar704,auVar273);
        auVar675 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
        uVar46 = vcmpps_avx512vl(auVar1009,auVar675,2);
        auVar274._8_4_ = 0x3f000000;
        auVar274._0_8_ = 0x3f0000003f000000;
        auVar274._12_4_ = 0x3f000000;
        auVar274._16_4_ = 0x3f000000;
        auVar274._20_4_ = 0x3f000000;
        auVar274._24_4_ = 0x3f000000;
        auVar274._28_4_ = 0x3f000000;
        auVar671 = vfmsub231ps_avx512vl(auVar671,auVar393,auVar274);
        auVar671 = vsubps_avx(auVar671,auVar705);
        auVar275._8_4_ = 0x3f318000;
        auVar275._0_8_ = 0x3f3180003f318000;
        auVar275._12_4_ = 0x3f318000;
        auVar275._16_4_ = 0x3f318000;
        auVar275._20_4_ = 0x3f318000;
        auVar275._24_4_ = 0x3f318000;
        auVar275._28_4_ = 0x3f318000;
        auVar672 = vfmsub231ps_avx512vl(auVar671,auVar704,auVar275);
        auVar671 = vpcmpeqd_avx2(auVar675,auVar675);
        bVar11 = (bool)((byte)uVar46 & 1);
        bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar1136._8_4_ = 0x42b0c0a5;
        auVar1136._0_8_ = 0x42b0c0a542b0c0a5;
        auVar1136._12_4_ = 0x42b0c0a5;
        auVar1136._16_4_ = 0x42b0c0a5;
        auVar1136._20_4_ = 0x42b0c0a5;
        auVar1136._24_4_ = 0x42b0c0a5;
        auVar1136._28_4_ = 0x42b0c0a5;
        auVar1192._8_4_ = 0xc2b0c0a5;
        auVar1192._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1192._12_4_ = 0xc2b0c0a5;
        auVar1192._16_4_ = 0xc2b0c0a5;
        auVar1192._20_4_ = 0xc2b0c0a5;
        auVar1192._24_4_ = 0xc2b0c0a5;
        auVar1192._28_4_ = 0xc2b0c0a5;
        auVar1255._8_4_ = 0x3f000000;
        auVar1255._0_8_ = 0x3f0000003f000000;
        auVar1255._12_4_ = 0x3f000000;
        auVar1255._16_4_ = 0x3f000000;
        auVar1255._20_4_ = 0x3f000000;
        auVar1255._24_4_ = 0x3f000000;
        auVar1255._28_4_ = 0x3f000000;
        auVar1321._8_4_ = 0x3fb8aa3b;
        auVar1321._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar1321._12_4_ = 0x3fb8aa3b;
        auVar1321._16_4_ = 0x3fb8aa3b;
        auVar1321._20_4_ = 0x3fb8aa3b;
        auVar1321._24_4_ = 0x3fb8aa3b;
        auVar1321._28_4_ = 0x3fb8aa3b;
        auVar1377._8_4_ = 0x3f318000;
        auVar1377._0_8_ = 0x3f3180003f318000;
        auVar1377._12_4_ = 0x3f318000;
        auVar1377._16_4_ = 0x3f318000;
        auVar1377._20_4_ = 0x3f318000;
        auVar1377._24_4_ = 0x3f318000;
        auVar1377._28_4_ = 0x3f318000;
        auVar1432._8_4_ = 0x395e8083;
        auVar1432._0_8_ = 0x395e8083395e8083;
        auVar1432._12_4_ = 0x395e8083;
        auVar1432._16_4_ = 0x395e8083;
        auVar1432._20_4_ = 0x395e8083;
        auVar1432._24_4_ = 0x395e8083;
        auVar1432._28_4_ = 0x395e8083;
        auVar1486._8_4_ = 0x39506967;
        auVar1486._0_8_ = 0x3950696739506967;
        auVar1486._12_4_ = 0x39506967;
        auVar1486._16_4_ = 0x39506967;
        auVar1486._20_4_ = 0x39506967;
        auVar1486._24_4_ = 0x39506967;
        auVar1486._28_4_ = 0x39506967;
        auVar1540._8_4_ = 0x3ab743ce;
        auVar1540._0_8_ = 0x3ab743ce3ab743ce;
        auVar1540._12_4_ = 0x3ab743ce;
        auVar1540._16_4_ = 0x3ab743ce;
        auVar1540._20_4_ = 0x3ab743ce;
        auVar1540._24_4_ = 0x3ab743ce;
        auVar1540._28_4_ = 0x3ab743ce;
        auVar1594._8_4_ = 0x3c088908;
        auVar1594._0_8_ = 0x3c0889083c088908;
        auVar1594._12_4_ = 0x3c088908;
        auVar1594._16_4_ = 0x3c088908;
        auVar1594._20_4_ = 0x3c088908;
        auVar1594._24_4_ = 0x3c088908;
        auVar1594._28_4_ = 0x3c088908;
        auVar1648._8_4_ = 0x3d2aa9c1;
        auVar1648._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar1648._12_4_ = 0x3d2aa9c1;
        auVar1648._16_4_ = 0x3d2aa9c1;
        auVar1648._20_4_ = 0x3d2aa9c1;
        auVar1648._24_4_ = 0x3d2aa9c1;
        auVar1648._28_4_ = 0x3d2aa9c1;
        auVar1702._8_4_ = 0x3e2aaaaa;
        auVar1702._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar1702._12_4_ = 0x3e2aaaaa;
        auVar1702._16_4_ = 0x3e2aaaaa;
        auVar1702._20_4_ = 0x3e2aaaaa;
        auVar1702._24_4_ = 0x3e2aaaaa;
        auVar1702._28_4_ = 0x3e2aaaaa;
        auVar1753._8_4_ = 0x3f800000;
        auVar1753._0_8_ = 0x3f8000003f800000;
        auVar1753._12_4_ = 0x3f800000;
        auVar1753._16_4_ = 0x3f800000;
        auVar1753._20_4_ = 0x3f800000;
        auVar1753._24_4_ = 0x3f800000;
        auVar1753._28_4_ = 0x3f800000;
        uVar872 = uVar422;
        do {
          auVar1804._0_4_ =
               (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar672._0_4_) *
               *(float *)*(undefined1 (*) [64])ptr1;
          auVar1804._4_4_ =
               (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar672._4_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          auVar1804._8_4_ =
               (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar672._8_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          auVar1804._12_4_ =
               (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar672._12_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          auVar1804._16_4_ =
               (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar672._16_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          auVar1804._20_4_ =
               (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar672._20_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
          auVar1804._28_36_ = in_ZMM15._28_36_;
          auVar1804._24_4_ =
               (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar672._24_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
          auVar675 = vminps_avx(auVar1804._0_32_,auVar1136);
          auVar675 = vmaxps_avx(auVar675,auVar1192);
          auVar684 = vfmadd231ps_avx512vl(auVar1255,auVar675,auVar1321);
          auVar676 = vrndscaleps_avx512vl(auVar684,1);
          uVar46 = vcmpps_avx512vl(auVar684,auVar676,1);
          auVar684 = vaddps_avx512vl(auVar676,auVar1083);
          bVar18 = (bool)((byte)uVar46 & 1);
          auVar706._0_4_ = (uint)bVar18 * auVar684._0_4_ | (uint)!bVar18 * auVar676._0_4_;
          bVar18 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar706._4_4_ = (uint)bVar18 * auVar684._4_4_ | (uint)!bVar18 * auVar676._4_4_;
          bVar18 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar706._8_4_ = (uint)bVar18 * auVar684._8_4_ | (uint)!bVar18 * auVar676._8_4_;
          bVar18 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar706._12_4_ = (uint)bVar18 * auVar684._12_4_ | (uint)!bVar18 * auVar676._12_4_;
          bVar18 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar706._16_4_ = (uint)bVar18 * auVar684._16_4_ | (uint)!bVar18 * auVar676._16_4_;
          bVar18 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar706._20_4_ = (uint)bVar18 * auVar684._20_4_ | (uint)!bVar18 * auVar676._20_4_;
          bVar18 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar706._24_4_ = (uint)bVar18 * auVar684._24_4_ | (uint)!bVar18 * auVar676._24_4_;
          bVar18 = SUB81(uVar46 >> 7,0);
          auVar706._28_4_ = (uint)bVar18 * auVar684._28_4_ | (uint)!bVar18 * auVar676._28_4_;
          auVar675 = vfmsub231ps_avx512vl(auVar675,auVar706,auVar1377);
          auVar675 = vfmsub231ps_avx512vl(auVar675,auVar706,auVar1432);
          auVar684 = vfmadd213ps_avx512vl(auVar1486,auVar675,auVar1540);
          auVar676 = vmulps_avx512vl(auVar675,auVar675);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1594);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1648);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1702);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1255);
          auVar684 = vfmadd213ps_avx512vl(auVar684,auVar676,auVar675);
          auVar675 = vcvttps2dq_avx512vl(auVar706);
          auVar675 = vpslld_avx2(auVar675,0x17);
          auVar675 = vpaddd_avx2(auVar675,auVar1753);
          auVar675 = vfmadd213ps_avx512vl(auVar675,auVar684,auVar675);
          in_ZMM15 = (float  [16])ZEXT3264(auVar675);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar675;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar422 = uVar872 + 8;
          iVar421 = uVar872 + 0xf;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if ((int)(uVar422 | 3) < (int)uVar424) {
        auVar122._8_4_ = 0x800000;
        auVar122._0_8_ = 0x80000000800000;
        auVar122._12_4_ = 0x800000;
        auVar492 = vmaxps_avx512vl(auVar462,auVar122);
        auVar516 = vpsrld_avx(auVar492,0x17);
        auVar1108._8_4_ = 0x3f000000;
        auVar1108._0_8_ = 0x3f0000003f000000;
        auVar1108._12_4_ = 0x3f000000;
        auVar123._8_4_ = 0x807fffff;
        auVar123._0_8_ = 0x807fffff807fffff;
        auVar123._12_4_ = 0x807fffff;
        auVar493 = vpternlogd_avx512vl(auVar1108,auVar492,auVar123,0xf8);
        auVar124._8_4_ = 0xffffff82;
        auVar124._0_8_ = 0xffffff82ffffff82;
        auVar124._12_4_ = 0xffffff82;
        auVar492 = vpaddd_avx512vl(auVar516,auVar124);
        auVar492 = vcvtdq2ps_avx(auVar492);
        auVar125._8_4_ = 0x3f3504f3;
        auVar125._0_8_ = 0x3f3504f33f3504f3;
        auVar125._12_4_ = 0x3f3504f3;
        uVar46 = vcmpps_avx512vl(auVar493,auVar125,1);
        auVar954._8_4_ = 0xbf800000;
        auVar954._0_8_ = 0xbf800000bf800000;
        auVar954._12_4_ = 0xbf800000;
        auVar1215._0_4_ = auVar493._0_4_ + -1.0;
        auVar1215._4_4_ = auVar493._4_4_ + -1.0;
        auVar1215._8_4_ = auVar493._8_4_ + -1.0;
        auVar1215._12_4_ = auVar493._12_4_ + -1.0;
        auVar516 = vaddps_avx512vl(auVar492,auVar954);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar526._0_4_ = (uint)bVar11 * auVar516._0_4_ | (uint)!bVar11 * auVar492._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar526._4_4_ = (uint)bVar11 * auVar516._4_4_ | (uint)!bVar11 * auVar492._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar526._8_4_ = (uint)bVar11 * auVar516._8_4_ | (uint)!bVar11 * auVar492._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar526._12_4_ = (uint)bVar11 * auVar516._12_4_ | (uint)!bVar11 * auVar492._12_4_;
        auVar492 = vaddps_avx512vl(auVar1215,auVar493);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar527._0_4_ =
             (float)((uint)bVar11 * auVar492._0_4_ | (uint)!bVar11 * (int)auVar1215._0_4_);
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar527._4_4_ =
             (float)((uint)bVar11 * auVar492._4_4_ | (uint)!bVar11 * (int)auVar1215._4_4_);
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar527._8_4_ =
             (float)((uint)bVar11 * auVar492._8_4_ | (uint)!bVar11 * (int)auVar1215._8_4_);
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar527._12_4_ =
             (float)((uint)bVar11 * auVar492._12_4_ | (uint)!bVar11 * (int)auVar1215._12_4_);
        auVar1109._0_4_ = auVar527._0_4_ * auVar527._0_4_;
        auVar1109._4_4_ = auVar527._4_4_ * auVar527._4_4_;
        auVar1109._8_4_ = auVar527._8_4_ * auVar527._8_4_;
        auVar1109._12_4_ = auVar527._12_4_ * auVar527._12_4_;
        auVar1280._8_4_ = 0x3d9021bb;
        auVar1280._0_8_ = 0x3d9021bb3d9021bb;
        auVar1280._12_4_ = 0x3d9021bb;
        auVar126._8_4_ = 0xbdebd1b8;
        auVar126._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar126._12_4_ = 0xbdebd1b8;
        auVar492 = vfmadd213ps_avx512vl(auVar1280,auVar527,auVar126);
        auVar127._8_4_ = 0x3def251a;
        auVar127._0_8_ = 0x3def251a3def251a;
        auVar127._12_4_ = 0x3def251a;
        auVar492 = vfmadd213ps_avx512vl(auVar492,auVar527,auVar127);
        auVar128._8_4_ = 0xbdfe5d4f;
        auVar128._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar128._12_4_ = 0xbdfe5d4f;
        auVar492 = vfmadd213ps_avx512vl(auVar492,auVar527,auVar128);
        auVar129._8_4_ = 0x3e11e9bf;
        auVar129._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar129._12_4_ = 0x3e11e9bf;
        auVar492 = vfmadd213ps_avx512vl(auVar492,auVar527,auVar129);
        auVar130._8_4_ = 0xbe2aae50;
        auVar130._0_8_ = 0xbe2aae50be2aae50;
        auVar130._12_4_ = 0xbe2aae50;
        auVar492 = vfmadd213ps_avx512vl(auVar492,auVar527,auVar130);
        auVar131._8_4_ = 0x3e4cceac;
        auVar131._0_8_ = 0x3e4cceac3e4cceac;
        auVar131._12_4_ = 0x3e4cceac;
        auVar492 = vfmadd213ps_avx512vl(auVar492,auVar527,auVar131);
        auVar132._8_4_ = 0xbe7ffffc;
        auVar132._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar132._12_4_ = 0xbe7ffffc;
        auVar492 = vfmadd213ps_avx512vl(auVar492,auVar527,auVar132);
        auVar133._8_4_ = 0x3eaaaaaa;
        auVar133._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar133._12_4_ = 0x3eaaaaaa;
        auVar492 = vfmadd213ps_avx512vl(auVar492,auVar527,auVar133);
        auVar1281._0_4_ = auVar1109._0_4_ * auVar527._0_4_ * auVar492._0_4_;
        auVar1281._4_4_ = auVar1109._4_4_ * auVar527._4_4_ * auVar492._4_4_;
        auVar1281._8_4_ = auVar1109._8_4_ * auVar527._8_4_ * auVar492._8_4_;
        auVar1281._12_4_ = auVar1109._12_4_ * auVar527._12_4_ * auVar492._12_4_;
        auVar134._8_4_ = 0xb95e8083;
        auVar134._0_8_ = 0xb95e8083b95e8083;
        auVar134._12_4_ = 0xb95e8083;
        auVar492 = vfmadd231ps_avx512vl(auVar1281,auVar526,auVar134);
        uVar46 = vcmpps_avx512vl(auVar462,(undefined1  [16])0x0,2);
        auVar135._8_4_ = 0x3f000000;
        auVar135._0_8_ = 0x3f0000003f000000;
        auVar135._12_4_ = 0x3f000000;
        auVar462 = vfmsub231ps_avx512vl(auVar492,auVar1109,auVar135);
        auVar462 = vsubps_avx(auVar462,auVar527);
        auVar136._8_4_ = 0x3f318000;
        auVar136._0_8_ = 0x3f3180003f318000;
        auVar136._12_4_ = 0x3f318000;
        auVar492 = vfmsub231ps_avx512vl(auVar462,auVar526,auVar136);
        auVar462 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
        bVar11 = (bool)((byte)uVar46 & 1);
        bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar1032._8_4_ = 0x42b0c0a5;
        auVar1032._0_8_ = 0x42b0c0a542b0c0a5;
        auVar1032._12_4_ = 0x42b0c0a5;
        auVar1110._8_4_ = 0xc2b0c0a5;
        auVar1110._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1110._12_4_ = 0xc2b0c0a5;
        auVar1164._8_4_ = 0x3f000000;
        auVar1164._0_8_ = 0x3f0000003f000000;
        auVar1164._12_4_ = 0x3f000000;
        auVar1216._8_4_ = 0x3fb8aa3b;
        auVar1216._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar1216._12_4_ = 0x3fb8aa3b;
        auVar1282._8_4_ = 0x3f318000;
        auVar1282._0_8_ = 0x3f3180003f318000;
        auVar1282._12_4_ = 0x3f318000;
        auVar1341._8_4_ = 0x395e8083;
        auVar1341._0_8_ = 0x395e8083395e8083;
        auVar1341._12_4_ = 0x395e8083;
        auVar1397._8_4_ = 0x39506967;
        auVar1397._0_8_ = 0x3950696739506967;
        auVar1397._12_4_ = 0x39506967;
        auVar1451._8_4_ = 0x3ab743ce;
        auVar1451._0_8_ = 0x3ab743ce3ab743ce;
        auVar1451._12_4_ = 0x3ab743ce;
        auVar1505._8_4_ = 0x3c088908;
        auVar1505._0_8_ = 0x3c0889083c088908;
        auVar1505._12_4_ = 0x3c088908;
        auVar1559._8_4_ = 0x3d2aa9c1;
        auVar1559._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar1559._12_4_ = 0x3d2aa9c1;
        auVar1613._8_4_ = 0x3e2aaaaa;
        auVar1613._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar1613._12_4_ = 0x3e2aaaaa;
        auVar1667._8_4_ = 0x3f800000;
        auVar1667._0_8_ = 0x3f8000003f800000;
        auVar1667._12_4_ = 0x3f800000;
        uVar872 = uVar422;
        do {
          auVar1721._0_4_ =
               (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar492._0_4_) *
               *(float *)*(undefined1 (*) [64])ptr1;
          auVar1721._4_4_ =
               (float)((uint)bVar12 * auVar462._4_4_ | (uint)!bVar12 * auVar492._4_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          auVar1721._8_4_ =
               (float)((uint)bVar13 * auVar462._8_4_ | (uint)!bVar13 * auVar492._8_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          auVar1721._12_4_ =
               (float)((uint)bVar14 * auVar462._12_4_ | (uint)!bVar14 * auVar492._12_4_) *
               *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          auVar493 = vminps_avx(auVar1721,auVar1032);
          auVar493 = vmaxps_avx(auVar493,auVar1110);
          auVar516 = vfmadd231ps_fma(auVar1164,auVar493,auVar1216);
          auVar504 = vcvttps2dq_avx512vl(auVar516);
          auVar504 = vcvtdq2ps_avx512vl(auVar504);
          uVar46 = vcmpps_avx512vl(auVar516,auVar504,1);
          auVar516 = vaddps_avx512vl(auVar504,auVar954);
          bVar15 = (bool)((byte)uVar46 & 1);
          auVar528._0_4_ = (uint)bVar15 * auVar516._0_4_ | (uint)!bVar15 * auVar504._0_4_;
          bVar15 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar528._4_4_ = (uint)bVar15 * auVar516._4_4_ | (uint)!bVar15 * auVar504._4_4_;
          bVar15 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar528._8_4_ = (uint)bVar15 * auVar516._8_4_ | (uint)!bVar15 * auVar504._8_4_;
          bVar15 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar528._12_4_ = (uint)bVar15 * auVar516._12_4_ | (uint)!bVar15 * auVar504._12_4_;
          auVar493 = vfmsub231ps_avx512vl(auVar493,auVar528,auVar1282);
          auVar516 = vfmsub231ps_avx512vl(auVar493,auVar528,auVar1341);
          auVar493 = vfmadd213ps_fma(auVar1397,auVar516,auVar1451);
          auVar504 = vmulps_avx512vl(auVar516,auVar516);
          auVar493 = vfmadd213ps_fma(auVar493,auVar516,auVar1505);
          auVar493 = vfmadd213ps_fma(auVar493,auVar516,auVar1559);
          auVar493 = vfmadd213ps_fma(auVar493,auVar516,auVar1613);
          auVar493 = vfmadd213ps_fma(auVar493,auVar516,auVar1164);
          auVar516 = vfmadd213ps_avx512vl(auVar493,auVar504,auVar516);
          auVar493 = vcvttps2dq_avx512vl(auVar528);
          auVar493 = vpslld_avx(auVar493,0x17);
          auVar493 = vpaddd_avx(auVar493,auVar1667);
          auVar493 = vfmadd213ps_fma(auVar493,auVar516,auVar493);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar493;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar422 = uVar872 + 4;
          iVar421 = uVar872 + 7;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        return;
      }
      lVar425 = 0;
      do {
        auVar917._0_4_ = powf(auVar559._0_4_,*(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4));
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar917._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    auVar559._0_4_ = *ptr1;
    if (iVar421 == 4) {
      _local_78 = *(undefined1 (*) [16])ptr1;
      auVar730 = ZEXT3264(CONCAT1616(_local_78,_local_78));
    }
    else {
      local_78._4_4_ = auVar559._0_4_;
      local_78._0_4_ = auVar559._0_4_;
      fStack_70 = auVar559._0_4_;
      fStack_6c = auVar559._0_4_;
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar730 = ZEXT3264(CONCAT428(auVar559._0_4_,
                                      CONCAT424(auVar559._0_4_,
                                                CONCAT420(auVar559._0_4_,
                                                          CONCAT416(auVar559._0_4_,
                                                                    CONCAT412(auVar559._0_4_,
                                                                              CONCAT48(auVar559.
                                                  _0_4_,CONCAT44(auVar559._0_4_,auVar559._0_4_))))))
                                     ));
        if (iVar421 == 0x10) {
          auVar730 = vmovdqu64_avx512f(auVar730);
          local_68 = auVar730._0_28_;
          auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_003aab71;
        }
      }
    }
    auVar712 = vmovdqu64_avx512f(auVar730);
    local_68 = auVar712._0_28_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar730._0_32_,1);
LAB_003aab71:
    uVar422 = 0;
    auVar462 = ZEXT416((uint)auVar559._0_4_);
    if (0xf < (int)uVar424) {
      auVar712 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
      auVar713 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar714 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar715 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
      auVar716 = vpxord_avx512f(auVar712,auVar714);
      auVar717 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
      auVar492 = auVar717._0_16_;
      auVar718 = vpxord_avx512f(auVar717,auVar714);
      auVar719 = vpxord_avx512f(auVar715,auVar714);
      iVar421 = 0xf;
      auVar462 = vxorps_avx512vl(auVar498,auVar498);
      auVar714 = vpternlogd_avx512f(auVar714,auVar714,auVar714,0xff);
      do {
        auVar720 = vmaxps_avx512f(*(undefined1 (*) [64])ptr,(undefined1  [64])_ps512_min_norm_pos);
        auVar721 = vpsrld_avx512f(auVar720,0x17);
        auVar720 = vpternlogd_avx512f(auVar720,auVar712,(undefined1  [64])_ps512_inv_mant_mask,0xec)
        ;
        uVar46 = vcmpps_avx512f(auVar720,(undefined1  [64])_ps512_cephes_SQRTHF,1);
        auVar722 = vsubps_avx512f(auVar720,(undefined1  [64])afVar404);
        auVar720 = vaddps_avx512f(auVar722,auVar720);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar852._0_4_ = (uint)bVar11 * auVar720._0_4_ | (uint)!bVar11 * auVar722._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar852._4_4_ = (uint)bVar11 * auVar720._4_4_ | (uint)!bVar11 * auVar722._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar852._8_4_ = (uint)bVar11 * auVar720._8_4_ | (uint)!bVar11 * auVar722._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar852._12_4_ = (uint)bVar11 * auVar720._12_4_ | (uint)!bVar11 * auVar722._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar852._16_4_ = (uint)bVar11 * auVar720._16_4_ | (uint)!bVar11 * auVar722._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar852._20_4_ = (uint)bVar11 * auVar720._20_4_ | (uint)!bVar11 * auVar722._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar852._24_4_ = (uint)bVar11 * auVar720._24_4_ | (uint)!bVar11 * auVar722._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        auVar852._28_4_ = (uint)bVar11 * auVar720._28_4_ | (uint)!bVar11 * auVar722._28_4_;
        bVar28 = (byte)(uVar46 >> 8);
        bVar11 = (bool)(bVar28 & 1);
        auVar852._32_4_ = (uint)bVar11 * auVar720._32_4_ | (uint)!bVar11 * auVar722._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        auVar852._36_4_ = (uint)bVar11 * auVar720._36_4_ | (uint)!bVar11 * auVar722._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        auVar852._40_4_ = (uint)bVar11 * auVar720._40_4_ | (uint)!bVar11 * auVar722._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        auVar852._44_4_ = (uint)bVar11 * auVar720._44_4_ | (uint)!bVar11 * auVar722._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        auVar852._48_4_ = (uint)bVar11 * auVar720._48_4_ | (uint)!bVar11 * auVar722._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        auVar852._52_4_ = (uint)bVar11 * auVar720._52_4_ | (uint)!bVar11 * auVar722._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        auVar852._56_4_ = (uint)bVar11 * auVar720._56_4_ | (uint)!bVar11 * auVar722._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        auVar852._60_4_ = (uint)bVar11 * auVar720._60_4_ | (uint)!bVar11 * auVar722._60_4_;
        auVar720 = vfmadd132ps_avx512f(auVar852,(undefined1  [64])_ps512_cephes_log_p1,
                                       (undefined1  [64])_ps512_cephes_log_p0);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar852,(undefined1  [64])afVar414);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar852,(undefined1  [64])afVar415);
        auVar722 = vmulps_avx512f(auVar852,auVar852);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar852,(undefined1  [64])afVar416);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar852,(undefined1  [64])afVar417);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar852,(undefined1  [64])afVar418);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar852,(undefined1  [64])afVar419);
        auVar720 = vfmadd213ps_avx512f(auVar720,auVar852,(undefined1  [64])afVar420);
        auVar723 = vmulps_avx512f(auVar722,auVar852);
        auVar720 = vfmadd213ps_avx512f(auVar723,auVar720,auVar852);
        auVar721 = vpsubd_avx512f(auVar721,auVar713);
        auVar721 = vcvtdq2ps_avx512f(auVar721);
        auVar723 = vaddps_avx512f(auVar721,(undefined1  [64])afVar404);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar853._0_4_ = (uint)bVar11 * auVar721._0_4_ | (uint)!bVar11 * auVar723._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar853._4_4_ = (uint)bVar11 * auVar721._4_4_ | (uint)!bVar11 * auVar723._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar853._8_4_ = (uint)bVar11 * auVar721._8_4_ | (uint)!bVar11 * auVar723._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar853._12_4_ = (uint)bVar11 * auVar721._12_4_ | (uint)!bVar11 * auVar723._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar853._16_4_ = (uint)bVar11 * auVar721._16_4_ | (uint)!bVar11 * auVar723._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar853._20_4_ = (uint)bVar11 * auVar721._20_4_ | (uint)!bVar11 * auVar723._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar853._24_4_ = (uint)bVar11 * auVar721._24_4_ | (uint)!bVar11 * auVar723._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        auVar853._28_4_ = (uint)bVar11 * auVar721._28_4_ | (uint)!bVar11 * auVar723._28_4_;
        bVar11 = (bool)(bVar28 & 1);
        auVar853._32_4_ = (uint)bVar11 * auVar721._32_4_ | (uint)!bVar11 * auVar723._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        auVar853._36_4_ = (uint)bVar11 * auVar721._36_4_ | (uint)!bVar11 * auVar723._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        auVar853._40_4_ = (uint)bVar11 * auVar721._40_4_ | (uint)!bVar11 * auVar723._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        auVar853._44_4_ = (uint)bVar11 * auVar721._44_4_ | (uint)!bVar11 * auVar723._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        auVar853._48_4_ = (uint)bVar11 * auVar721._48_4_ | (uint)!bVar11 * auVar723._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        auVar853._52_4_ = (uint)bVar11 * auVar721._52_4_ | (uint)!bVar11 * auVar723._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        auVar853._56_4_ = (uint)bVar11 * auVar721._56_4_ | (uint)!bVar11 * auVar723._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        auVar853._60_4_ = (uint)bVar11 * auVar721._60_4_ | (uint)!bVar11 * auVar723._60_4_;
        uVar46 = vcmpps_avx512f(*(undefined1 (*) [64])ptr,ZEXT1664(auVar462),2);
        auVar720 = vfmadd231ps_avx512f(auVar720,auVar853,auVar715);
        auVar720 = vfmadd231ps_avx512f(auVar720,auVar716,auVar722);
        auVar720 = vfmadd231ps_avx512f(auVar720,auVar717,auVar853);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar854._0_4_ = (uint)bVar11 * auVar714._0_4_ | (uint)!bVar11 * auVar720._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar854._4_4_ = (uint)bVar11 * auVar714._4_4_ | (uint)!bVar11 * auVar720._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar854._8_4_ = (uint)bVar11 * auVar714._8_4_ | (uint)!bVar11 * auVar720._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar854._12_4_ = (uint)bVar11 * auVar714._12_4_ | (uint)!bVar11 * auVar720._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar854._16_4_ = (uint)bVar11 * auVar714._16_4_ | (uint)!bVar11 * auVar720._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar854._20_4_ = (uint)bVar11 * auVar714._20_4_ | (uint)!bVar11 * auVar720._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar854._24_4_ = (uint)bVar11 * auVar714._24_4_ | (uint)!bVar11 * auVar720._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        auVar854._28_4_ = (uint)bVar11 * auVar714._28_4_ | (uint)!bVar11 * auVar720._28_4_;
        bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
        auVar854._32_4_ = (uint)bVar11 * auVar714._32_4_ | (uint)!bVar11 * auVar720._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        auVar854._36_4_ = (uint)bVar11 * auVar714._36_4_ | (uint)!bVar11 * auVar720._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        auVar854._40_4_ = (uint)bVar11 * auVar714._40_4_ | (uint)!bVar11 * auVar720._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        auVar854._44_4_ = (uint)bVar11 * auVar714._44_4_ | (uint)!bVar11 * auVar720._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        auVar854._48_4_ = (uint)bVar11 * auVar714._48_4_ | (uint)!bVar11 * auVar720._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        auVar854._52_4_ = (uint)bVar11 * auVar714._52_4_ | (uint)!bVar11 * auVar720._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        auVar854._56_4_ = (uint)bVar11 * auVar714._56_4_ | (uint)!bVar11 * auVar720._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        auVar854._60_4_ = (uint)bVar11 * auVar714._60_4_ | (uint)!bVar11 * auVar720._60_4_;
        auVar720 = vmulps_avx512f(auVar854,auVar730);
        auVar720 = vminps_avx512f(auVar720,(undefined1  [64])afVar405);
        auVar720 = vmaxps_avx512f(auVar720,(undefined1  [64])afVar406);
        auVar721 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar720,auVar712);
        auVar722 = vrndscaleps_avx512f(auVar721,1);
        uVar46 = vcmpps_avx512f(auVar721,auVar722,1);
        auVar721 = vsubps_avx512f(auVar722,(undefined1  [64])afVar404);
        bVar11 = (bool)((byte)uVar46 & 1);
        in_ZMM5._0_4_ = (uint)bVar11 * auVar721._0_4_ | (uint)!bVar11 * auVar722._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        in_ZMM5._4_4_ = (uint)bVar11 * auVar721._4_4_ | (uint)!bVar11 * auVar722._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        in_ZMM5._8_4_ = (uint)bVar11 * auVar721._8_4_ | (uint)!bVar11 * auVar722._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        in_ZMM5._12_4_ = (uint)bVar11 * auVar721._12_4_ | (uint)!bVar11 * auVar722._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        in_ZMM5._16_4_ = (uint)bVar11 * auVar721._16_4_ | (uint)!bVar11 * auVar722._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        in_ZMM5._20_4_ = (uint)bVar11 * auVar721._20_4_ | (uint)!bVar11 * auVar722._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        in_ZMM5._24_4_ = (uint)bVar11 * auVar721._24_4_ | (uint)!bVar11 * auVar722._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        in_ZMM5._28_4_ = (uint)bVar11 * auVar721._28_4_ | (uint)!bVar11 * auVar722._28_4_;
        bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
        in_ZMM5._32_4_ = (uint)bVar11 * auVar721._32_4_ | (uint)!bVar11 * auVar722._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        in_ZMM5._36_4_ = (uint)bVar11 * auVar721._36_4_ | (uint)!bVar11 * auVar722._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        in_ZMM5._40_4_ = (uint)bVar11 * auVar721._40_4_ | (uint)!bVar11 * auVar722._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        in_ZMM5._44_4_ = (uint)bVar11 * auVar721._44_4_ | (uint)!bVar11 * auVar722._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        in_ZMM5._48_4_ = (uint)bVar11 * auVar721._48_4_ | (uint)!bVar11 * auVar722._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        in_ZMM5._52_4_ = (uint)bVar11 * auVar721._52_4_ | (uint)!bVar11 * auVar722._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        in_ZMM5._56_4_ = (uint)bVar11 * auVar721._56_4_ | (uint)!bVar11 * auVar722._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        in_ZMM5._60_4_ = (uint)bVar11 * auVar721._60_4_ | (uint)!bVar11 * auVar722._60_4_;
        auVar720 = vfmadd231ps_avx512f(auVar720,in_ZMM5,auVar718);
        auVar720 = vfmadd231ps_avx512f(auVar720,in_ZMM5,auVar719);
        auVar721 = vfmadd213ps_avx512f(auVar720,(undefined1  [64])afVar408,
                                       (undefined1  [64])afVar409);
        auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,(undefined1  [64])afVar410);
        auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,(undefined1  [64])afVar411);
        auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,(undefined1  [64])afVar412);
        auVar722 = vmulps_avx512f(auVar720,auVar720);
        auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,auVar712);
        auVar720 = vfmadd213ps_avx512f(auVar721,auVar722,auVar720);
        auVar721 = vcvttps2dq_avx512f(in_ZMM5);
        in_ZMM4 = vaddps_avx512f(auVar720,(undefined1  [64])afVar404);
        auVar720 = vpaddd_avx512f(auVar721,auVar713);
        auVar720 = vpslld_avx512f(auVar720,0x17);
        auVar720 = vmulps_avx512f(in_ZMM4,auVar720);
        *(undefined1 (*) [64])outptr = auVar720;
        ptr = (float *)((long)ptr + 0x40);
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
      auVar462 = auVar516;
    }
    if ((int)(uVar422 | 7) < (int)uVar424) {
      auVar1372._8_4_ = 0xbf800000;
      auVar1372._0_8_ = 0xbf800000bf800000;
      auVar1372._12_4_ = 0xbf800000;
      auVar1372._16_4_ = 0xbf800000;
      auVar1372._20_4_ = 0xbf800000;
      auVar1372._24_4_ = 0xbf800000;
      auVar1372._28_4_ = 0xbf800000;
      auVar1428._8_4_ = 0x3f800000;
      auVar1428._0_8_ = 0x3f8000003f800000;
      auVar1428._12_4_ = 0x3f800000;
      auVar1428._16_4_ = 0x3f800000;
      auVar1428._20_4_ = 0x3f800000;
      auVar1428._24_4_ = 0x3f800000;
      auVar1428._28_4_ = 0x3f800000;
      auVar1482._8_4_ = 0x3d9021bb;
      auVar1482._0_8_ = 0x3d9021bb3d9021bb;
      auVar1482._12_4_ = 0x3d9021bb;
      auVar1482._16_4_ = 0x3d9021bb;
      auVar1482._20_4_ = 0x3d9021bb;
      auVar1482._24_4_ = 0x3d9021bb;
      auVar1482._28_4_ = 0x3d9021bb;
      auVar1536._8_4_ = 0xbdebd1b8;
      auVar1536._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1536._12_4_ = 0xbdebd1b8;
      auVar1536._16_4_ = 0xbdebd1b8;
      auVar1536._20_4_ = 0xbdebd1b8;
      auVar1536._24_4_ = 0xbdebd1b8;
      auVar1536._28_4_ = 0xbdebd1b8;
      auVar1590._8_4_ = 0x3def251a;
      auVar1590._0_8_ = 0x3def251a3def251a;
      auVar1590._12_4_ = 0x3def251a;
      auVar1590._16_4_ = 0x3def251a;
      auVar1590._20_4_ = 0x3def251a;
      auVar1590._24_4_ = 0x3def251a;
      auVar1590._28_4_ = 0x3def251a;
      auVar1644._8_4_ = 0xbdfe5d4f;
      auVar1644._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1644._12_4_ = 0xbdfe5d4f;
      auVar1644._16_4_ = 0xbdfe5d4f;
      auVar1644._20_4_ = 0xbdfe5d4f;
      auVar1644._24_4_ = 0xbdfe5d4f;
      auVar1644._28_4_ = 0xbdfe5d4f;
      auVar1698._8_4_ = 0x3e11e9bf;
      auVar1698._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1698._12_4_ = 0x3e11e9bf;
      auVar1698._16_4_ = 0x3e11e9bf;
      auVar1698._20_4_ = 0x3e11e9bf;
      auVar1698._24_4_ = 0x3e11e9bf;
      auVar1698._28_4_ = 0x3e11e9bf;
      auVar1749._8_4_ = 0xbe2aae50;
      auVar1749._0_8_ = 0xbe2aae50be2aae50;
      auVar1749._12_4_ = 0xbe2aae50;
      auVar1749._16_4_ = 0xbe2aae50;
      auVar1749._20_4_ = 0xbe2aae50;
      auVar1749._24_4_ = 0xbe2aae50;
      auVar1749._28_4_ = 0xbe2aae50;
      auVar1798._8_4_ = 0x3e4cceac;
      auVar1798._0_8_ = 0x3e4cceac3e4cceac;
      auVar1798._12_4_ = 0x3e4cceac;
      auVar1798._16_4_ = 0x3e4cceac;
      auVar1798._20_4_ = 0x3e4cceac;
      auVar1798._24_4_ = 0x3e4cceac;
      auVar1798._28_4_ = 0x3e4cceac;
      auVar672 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
      auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar684 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar676 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar677 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar492 = auVar677._0_16_;
      auVar462 = ZEXT816(0) << 0x40;
      auVar671 = vpcmpeqd_avx2(auVar730._0_32_,auVar730._0_32_);
      auVar680 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar681 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar682 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar562 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar563 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar564 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar567 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      uVar872 = uVar422;
      do {
        auVar257._8_4_ = 0x800000;
        auVar257._0_8_ = 0x80000000800000;
        auVar257._12_4_ = 0x800000;
        auVar257._16_4_ = 0x800000;
        auVar257._20_4_ = 0x800000;
        auVar257._24_4_ = 0x800000;
        auVar257._28_4_ = 0x800000;
        auVar560 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,auVar257);
        auVar553 = vpsrld_avx512vl(auVar560,0x17);
        auVar1132._8_4_ = 0x807fffff;
        auVar1132._0_8_ = 0x807fffff807fffff;
        auVar1132._12_4_ = 0x807fffff;
        auVar1132._16_4_ = 0x807fffff;
        auVar1132._20_4_ = 0x807fffff;
        auVar1132._24_4_ = 0x807fffff;
        auVar1132._28_4_ = 0x807fffff;
        auVar258._8_4_ = 0x3f000000;
        auVar258._0_8_ = 0x3f0000003f000000;
        auVar258._12_4_ = 0x3f000000;
        auVar258._16_4_ = 0x3f000000;
        auVar258._20_4_ = 0x3f000000;
        auVar258._24_4_ = 0x3f000000;
        auVar258._28_4_ = 0x3f000000;
        auVar560 = vpternlogd_avx512vl(auVar560,auVar1132,auVar258,0xea);
        auVar259._8_4_ = 0x3f3504f3;
        auVar259._0_8_ = 0x3f3504f33f3504f3;
        auVar259._12_4_ = 0x3f3504f3;
        auVar259._16_4_ = 0x3f3504f3;
        auVar259._20_4_ = 0x3f3504f3;
        auVar259._24_4_ = 0x3f3504f3;
        auVar259._28_4_ = 0x3f3504f3;
        uVar46 = vcmpps_avx512vl(auVar560,auVar259,1);
        auVar556 = vaddps_avx512vl(auVar560,auVar1372);
        auVar560 = vaddps_avx512vl(auVar556,auVar560);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar688._0_4_ = (float)((uint)bVar11 * auVar560._0_4_ | (uint)!bVar11 * auVar556._0_4_);
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar688._4_4_ = (float)((uint)bVar11 * auVar560._4_4_ | (uint)!bVar11 * auVar556._4_4_);
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar688._8_4_ = (float)((uint)bVar11 * auVar560._8_4_ | (uint)!bVar11 * auVar556._8_4_);
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar688._12_4_ = (float)((uint)bVar11 * auVar560._12_4_ | (uint)!bVar11 * auVar556._12_4_);
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar688._16_4_ = (float)((uint)bVar11 * auVar560._16_4_ | (uint)!bVar11 * auVar556._16_4_);
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar688._20_4_ = (float)((uint)bVar11 * auVar560._20_4_ | (uint)!bVar11 * auVar556._20_4_);
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar688._24_4_ = (float)((uint)bVar11 * auVar560._24_4_ | (uint)!bVar11 * auVar556._24_4_);
        bVar11 = SUB81(uVar46 >> 7,0);
        auVar688._28_4_ = (uint)bVar11 * auVar560._28_4_ | (uint)!bVar11 * auVar556._28_4_;
        auVar560 = vfmadd213ps_avx512vl(auVar1482,auVar688,auVar1536);
        auVar560 = vfmadd213ps_avx512vl(auVar560,auVar688,auVar1590);
        auVar560 = vfmadd213ps_avx512vl(auVar560,auVar688,auVar1644);
        auVar560 = vfmadd213ps_avx512vl(auVar560,auVar688,auVar1698);
        auVar1195._0_4_ = auVar688._0_4_ * auVar688._0_4_;
        auVar1195._4_4_ = auVar688._4_4_ * auVar688._4_4_;
        auVar1195._8_4_ = auVar688._8_4_ * auVar688._8_4_;
        auVar1195._12_4_ = auVar688._12_4_ * auVar688._12_4_;
        auVar1195._16_4_ = auVar688._16_4_ * auVar688._16_4_;
        auVar1195._20_4_ = auVar688._20_4_ * auVar688._20_4_;
        auVar1195._28_36_ = in_ZMM4._28_36_;
        auVar1195._24_4_ = auVar688._24_4_ * auVar688._24_4_;
        auVar560 = vfmadd213ps_avx512vl(auVar560,auVar688,auVar1749);
        auVar560 = vfmadd213ps_avx512vl(auVar560,auVar688,auVar1798);
        auVar560 = vfmadd213ps_avx512vl(auVar560,auVar688,auVar672);
        auVar560 = vfmadd213ps_avx512vl(auVar560,auVar688,auVar675);
        auVar1259._0_4_ = auVar1195._0_4_ * auVar688._0_4_;
        auVar1259._4_4_ = auVar1195._4_4_ * auVar688._4_4_;
        auVar1259._8_4_ = auVar1195._8_4_ * auVar688._8_4_;
        auVar1259._12_4_ = auVar1195._12_4_ * auVar688._12_4_;
        auVar1259._16_4_ = auVar1195._16_4_ * auVar688._16_4_;
        auVar1259._20_4_ = auVar1195._20_4_ * auVar688._20_4_;
        auVar1259._28_36_ = in_ZMM5._28_36_;
        auVar1259._24_4_ = auVar1195._24_4_ * auVar688._24_4_;
        auVar560 = vmulps_avx512vl(auVar1259._0_32_,auVar560);
        auVar260._8_4_ = 0xffffff82;
        auVar260._0_8_ = 0xffffff82ffffff82;
        auVar260._12_4_ = 0xffffff82;
        auVar260._16_4_ = 0xffffff82;
        auVar260._20_4_ = 0xffffff82;
        auVar260._24_4_ = 0xffffff82;
        auVar260._28_4_ = 0xffffff82;
        auVar553 = vpaddd_avx512vl(auVar553,auVar260);
        auVar553 = vcvtdq2ps_avx512vl(auVar553);
        auVar556 = vsubps_avx512vl(auVar553,auVar1428);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar689._0_4_ = (uint)bVar11 * auVar556._0_4_ | (uint)!bVar11 * auVar553._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar689._4_4_ = (uint)bVar11 * auVar556._4_4_ | (uint)!bVar11 * auVar553._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar689._8_4_ = (uint)bVar11 * auVar556._8_4_ | (uint)!bVar11 * auVar553._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar689._12_4_ = (uint)bVar11 * auVar556._12_4_ | (uint)!bVar11 * auVar553._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar689._16_4_ = (uint)bVar11 * auVar556._16_4_ | (uint)!bVar11 * auVar553._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar689._20_4_ = (uint)bVar11 * auVar556._20_4_ | (uint)!bVar11 * auVar553._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar689._24_4_ = (uint)bVar11 * auVar556._24_4_ | (uint)!bVar11 * auVar553._24_4_;
        bVar11 = SUB81(uVar46 >> 7,0);
        auVar689._28_4_ = (uint)bVar11 * auVar556._28_4_ | (uint)!bVar11 * auVar553._28_4_;
        auVar560 = vfmadd231ps_avx512vl(auVar560,auVar689,auVar684);
        auVar553 = vfmsub231ps_avx512vl(auVar560,auVar676,auVar1195._0_32_);
        uVar46 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr,ZEXT1632(auVar462),
                                 2);
        auVar560 = vsubps_avx(auVar553,auVar688);
        auVar560 = vfmsub231ps_avx512vl(auVar560,auVar677,auVar689);
        bVar11 = (bool)((byte)uVar46 & 1);
        bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
        bVar18 = SUB81(uVar46 >> 7,0);
        auVar389._4_4_ =
             (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar560._4_4_) *
             local_68._4_4_;
        auVar389._0_4_ =
             (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar560._0_4_) *
             local_68._0_4_;
        auVar389._8_4_ =
             (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar560._8_4_) *
             local_68._8_4_;
        auVar389._12_4_ =
             (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar560._12_4_) *
             local_68._12_4_;
        auVar389._16_4_ =
             (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar560._16_4_) *
             local_68._16_4_;
        auVar389._20_4_ =
             (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar560._20_4_) *
             local_68._20_4_;
        auVar389._24_4_ =
             (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar560._24_4_) *
             local_68._24_4_;
        auVar389._28_4_ = (uint)bVar18 * auVar671._28_4_ | (uint)!bVar18 * auVar560._28_4_;
        auVar560 = vminps_avx512vl(auVar389,auVar680);
        auVar556 = vmaxps_avx512vl(auVar560,auVar681);
        auVar552 = vfmadd231ps_avx512vl(auVar676,auVar556,auVar682);
        auVar560 = vroundps_avx(auVar552,1);
        uVar46 = vcmpps_avx512vl(auVar552,auVar560,1);
        auVar552 = vsubps_avx512vl(auVar560,auVar1428);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar690._0_4_ = (float)((uint)bVar11 * auVar552._0_4_ | (uint)!bVar11 * auVar560._0_4_);
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar690._4_4_ = (float)((uint)bVar11 * auVar552._4_4_ | (uint)!bVar11 * auVar560._4_4_);
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar690._8_4_ = (float)((uint)bVar11 * auVar552._8_4_ | (uint)!bVar11 * auVar560._8_4_);
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar690._12_4_ = (float)((uint)bVar11 * auVar552._12_4_ | (uint)!bVar11 * auVar560._12_4_);
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar690._16_4_ = (float)((uint)bVar11 * auVar552._16_4_ | (uint)!bVar11 * auVar560._16_4_);
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar690._20_4_ = (float)((uint)bVar11 * auVar552._20_4_ | (uint)!bVar11 * auVar560._20_4_);
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar690._24_4_ = (float)((uint)bVar11 * auVar552._24_4_ | (uint)!bVar11 * auVar560._24_4_);
        bVar11 = SUB81(uVar46 >> 7,0);
        auVar690._28_4_ = (float)((uint)bVar11 * auVar552._28_4_ | (uint)!bVar11 * auVar560._28_4_);
        in_ZMM4 = ZEXT3264(auVar690);
        auVar560 = vfmsub231ps_avx512vl(auVar556,auVar690,auVar677);
        auVar560 = vfnmsub231ps_avx512vl(auVar560,auVar690,auVar684);
        auVar556 = vfmadd213ps_avx512vl(auVar562,auVar560,auVar563);
        auVar390._4_4_ = auVar560._4_4_ * auVar560._4_4_;
        auVar390._0_4_ = auVar560._0_4_ * auVar560._0_4_;
        auVar390._8_4_ = auVar560._8_4_ * auVar560._8_4_;
        auVar390._12_4_ = auVar560._12_4_ * auVar560._12_4_;
        auVar390._16_4_ = auVar560._16_4_ * auVar560._16_4_;
        auVar390._20_4_ = auVar560._20_4_ * auVar560._20_4_;
        auVar390._24_4_ = auVar560._24_4_ * auVar560._24_4_;
        auVar390._28_4_ = auVar553._28_4_;
        in_ZMM5 = ZEXT3264(auVar390);
        auVar553 = vfmadd213ps_avx512vl(auVar556,auVar560,auVar564);
        auVar553 = vfmadd213ps_avx512vl(auVar553,auVar560,auVar565);
        auVar553 = vfmadd213ps_avx512vl(auVar553,auVar560,auVar566);
        auVar553 = vfmadd213ps_avx512vl(auVar553,auVar560,auVar676);
        auVar493 = vfmadd213ps_fma(auVar553,auVar390,auVar560);
        auVar1005._0_4_ = (int)auVar690._0_4_;
        auVar1005._4_4_ = (int)auVar690._4_4_;
        auVar1005._8_4_ = (int)auVar690._8_4_;
        auVar1005._12_4_ = (int)auVar690._12_4_;
        auVar1005._16_4_ = (int)auVar690._16_4_;
        auVar1005._20_4_ = (int)auVar690._20_4_;
        auVar1005._24_4_ = (int)auVar690._24_4_;
        auVar1005._28_4_ = (int)auVar690._28_4_;
        auVar560 = vpslld_avx2(auVar1005,0x17);
        auVar560 = vpaddd_avx512vl(auVar560,auVar567);
        auVar493 = vfmadd213ps_fma(auVar560,ZEXT1632(auVar493),auVar560);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar493);
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar422 = uVar872 + 8;
        iVar421 = uVar872 + 0xf;
        uVar872 = uVar422;
      } while (iVar421 < (int)uVar424);
    }
    if ((int)(uVar422 | 3) < (int)uVar424) {
      auVar1276._8_4_ = 0xbf800000;
      auVar1276._0_8_ = 0xbf800000bf800000;
      auVar1276._12_4_ = 0xbf800000;
      auVar1337._8_4_ = 0x3f800000;
      auVar1337._0_8_ = 0x3f8000003f800000;
      auVar1337._12_4_ = 0x3f800000;
      auVar1393._8_4_ = 0x3d9021bb;
      auVar1393._0_8_ = 0x3d9021bb3d9021bb;
      auVar1393._12_4_ = 0x3d9021bb;
      auVar1447._8_4_ = 0xbdebd1b8;
      auVar1447._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1447._12_4_ = 0xbdebd1b8;
      auVar1501._8_4_ = 0x3def251a;
      auVar1501._0_8_ = 0x3def251a3def251a;
      auVar1501._12_4_ = 0x3def251a;
      auVar1555._8_4_ = 0xbdfe5d4f;
      auVar1555._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1555._12_4_ = 0xbdfe5d4f;
      auVar1609._8_4_ = 0x3e11e9bf;
      auVar1609._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1609._12_4_ = 0x3e11e9bf;
      auVar1663._8_4_ = 0xbe2aae50;
      auVar1663._0_8_ = 0xbe2aae50be2aae50;
      auVar1663._12_4_ = 0xbe2aae50;
      auVar1717._8_4_ = 0x3e4cceac;
      auVar1717._0_8_ = 0x3e4cceac3e4cceac;
      auVar1717._12_4_ = 0x3e4cceac;
      auVar1769._8_4_ = 0xbe7ffffc;
      auVar1769._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1769._12_4_ = 0xbe7ffffc;
      auVar493 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar516 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar496 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar492 = vxorps_avx512vl(auVar492,auVar492);
      auVar462 = vpcmpeqd_avx(auVar462,auVar462);
      auVar497 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar498 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar501 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar502 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar520 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar439 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar440 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar441 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar442 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      uVar872 = uVar422;
      do {
        auVar118._8_4_ = 0x800000;
        auVar118._0_8_ = 0x80000000800000;
        auVar118._12_4_ = 0x800000;
        auVar443 = vmaxps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar118);
        auVar436 = vpsrld_avx512vl(auVar443,0x17);
        auVar1028._8_4_ = 0x807fffff;
        auVar1028._0_8_ = 0x807fffff807fffff;
        auVar1028._12_4_ = 0x807fffff;
        auVar119._8_4_ = 0x3f000000;
        auVar119._0_8_ = 0x3f0000003f000000;
        auVar119._12_4_ = 0x3f000000;
        auVar443 = vpternlogd_avx512vl(auVar443,auVar1028,auVar119,0xea);
        auVar120._8_4_ = 0x3f3504f3;
        auVar120._0_8_ = 0x3f3504f33f3504f3;
        auVar120._12_4_ = 0x3f3504f3;
        uVar46 = vcmpps_avx512vl(auVar443,auVar120,1);
        auVar437 = vaddps_avx512vl(auVar443,auVar1276);
        auVar443 = vaddps_avx512vl(auVar437,auVar443);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar508._0_4_ = (float)((uint)bVar11 * auVar443._0_4_ | (uint)!bVar11 * auVar437._0_4_);
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar508._4_4_ = (float)((uint)bVar11 * auVar443._4_4_ | (uint)!bVar11 * auVar437._4_4_);
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar508._8_4_ = (float)((uint)bVar11 * auVar443._8_4_ | (uint)!bVar11 * auVar437._8_4_);
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar508._12_4_ = (float)((uint)bVar11 * auVar443._12_4_ | (uint)!bVar11 * auVar437._12_4_);
        auVar443 = vfmadd213ps_avx512vl(auVar1393,auVar508,auVar1447);
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar508,auVar1501);
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar508,auVar1555);
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar508,auVar1609);
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar508,auVar1663);
        auVar1104._0_4_ = auVar508._0_4_ * auVar508._0_4_;
        auVar1104._4_4_ = auVar508._4_4_ * auVar508._4_4_;
        auVar1104._8_4_ = auVar508._8_4_ * auVar508._8_4_;
        auVar1104._12_4_ = auVar508._12_4_ * auVar508._12_4_;
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar508,auVar1717);
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar508,auVar1769);
        auVar1160._0_4_ = auVar1104._0_4_ * auVar508._0_4_;
        auVar1160._4_4_ = auVar1104._4_4_ * auVar508._4_4_;
        auVar1160._8_4_ = auVar1104._8_4_ * auVar508._8_4_;
        auVar1160._12_4_ = auVar1104._12_4_ * auVar508._12_4_;
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar508,auVar493);
        auVar437 = vmulps_avx512vl(auVar1160,auVar443);
        auVar121._8_4_ = 0xffffff82;
        auVar121._0_8_ = 0xffffff82ffffff82;
        auVar121._12_4_ = 0xffffff82;
        auVar443 = vpaddd_avx512vl(auVar436,auVar121);
        auVar443 = vcvtdq2ps_avx(auVar443);
        auVar436 = vsubps_avx512vl(auVar443,auVar1337);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar509._0_4_ = (uint)bVar11 * auVar436._0_4_ | (uint)!bVar11 * auVar443._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar509._4_4_ = (uint)bVar11 * auVar436._4_4_ | (uint)!bVar11 * auVar443._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar509._8_4_ = (uint)bVar11 * auVar436._8_4_ | (uint)!bVar11 * auVar443._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar509._12_4_ = (uint)bVar11 * auVar436._12_4_ | (uint)!bVar11 * auVar443._12_4_;
        auVar443 = vfmadd231ps_avx512vl(auVar437,auVar509,auVar516);
        auVar443 = vfmsub231ps_avx512vl(auVar443,auVar504,auVar1104);
        auVar443 = vsubps_avx(auVar443,auVar508);
        uVar46 = vcmpps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr,auVar492,2);
        auVar443 = vfmsub231ps_avx512vl(auVar443,auVar496,auVar509);
        bVar11 = (bool)((byte)uVar46 & 1);
        bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar947._0_4_ =
             (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar443._0_4_) *
             (float)local_78._0_4_;
        auVar947._4_4_ =
             (float)((uint)bVar12 * auVar462._4_4_ | (uint)!bVar12 * auVar443._4_4_) *
             (float)local_78._4_4_;
        auVar947._8_4_ =
             (float)((uint)bVar13 * auVar462._8_4_ | (uint)!bVar13 * auVar443._8_4_) * fStack_70;
        auVar947._12_4_ =
             (float)((uint)bVar14 * auVar462._12_4_ | (uint)!bVar14 * auVar443._12_4_) * fStack_6c;
        auVar443 = vminps_avx512vl(auVar947,auVar497);
        auVar436 = vmaxps_avx512vl(auVar443,auVar498);
        auVar437 = vfmadd231ps_avx512vl(auVar504,auVar436,auVar501);
        auVar1105._0_4_ = (int)auVar437._0_4_;
        auVar1105._4_4_ = (int)auVar437._4_4_;
        auVar1105._8_4_ = (int)auVar437._8_4_;
        auVar1105._12_4_ = (int)auVar437._12_4_;
        auVar443 = vcvtdq2ps_avx(auVar1105);
        uVar46 = vcmpps_avx512vl(auVar437,auVar443,1);
        auVar437 = vsubps_avx512vl(auVar443,auVar1337);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar510._0_4_ = (float)((uint)bVar11 * auVar437._0_4_ | (uint)!bVar11 * auVar443._0_4_);
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar510._4_4_ = (float)((uint)bVar11 * auVar437._4_4_ | (uint)!bVar11 * auVar443._4_4_);
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar510._8_4_ = (float)((uint)bVar11 * auVar437._8_4_ | (uint)!bVar11 * auVar443._8_4_);
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar510._12_4_ = (float)((uint)bVar11 * auVar437._12_4_ | (uint)!bVar11 * auVar443._12_4_);
        auVar443 = vfmsub231ps_avx512vl(auVar436,auVar510,auVar496);
        auVar443 = vfnmsub231ps_avx512vl(auVar443,auVar510,auVar516);
        auVar436 = vfmadd213ps_avx512vl(auVar502,auVar443,auVar520);
        auVar1161._0_4_ = auVar443._0_4_ * auVar443._0_4_;
        auVar1161._4_4_ = auVar443._4_4_ * auVar443._4_4_;
        auVar1161._8_4_ = auVar443._8_4_ * auVar443._8_4_;
        auVar1161._12_4_ = auVar443._12_4_ * auVar443._12_4_;
        auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar439);
        auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar440);
        auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar441);
        auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar504);
        auVar443 = vfmadd213ps_fma(auVar436,auVar1161,auVar443);
        auVar948._0_4_ = (int)auVar510._0_4_;
        auVar948._4_4_ = (int)auVar510._4_4_;
        auVar948._8_4_ = (int)auVar510._8_4_;
        auVar948._12_4_ = (int)auVar510._12_4_;
        auVar436 = vpslld_avx(auVar948,0x17);
        auVar436 = vpaddd_avx512vl(auVar436,auVar442);
        auVar443 = vfmadd213ps_fma(auVar436,auVar443,auVar436);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar443;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar422 = uVar872 + 4;
        iVar421 = uVar872 + 7;
        uVar872 = uVar422;
      } while (iVar421 < (int)uVar424);
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      return;
    }
    lVar425 = 0;
    do {
      auVar917._0_4_ = powf(*(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4),auVar559._0_4_);
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar917._0_4_;
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  case 7:
    uVar422 = bw;
    if (bw < aw) {
      uVar422 = aw;
    }
    iVar421 = bp;
    if (bp < ap) {
      iVar421 = ap;
    }
    uVar424 = iVar421 * uVar422;
    if (ap != bp) {
LAB_003a20fc:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        uVar424 = uVar422;
        if (0 < (int)uVar422 && iVar421 == 0x10) {
          do {
            auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar730 = vsubps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar424 = uVar424 - 1;
          } while (uVar424 != 0);
        }
        if (iVar421 == 8) {
          uVar424 = 0;
          if (1 < (int)uVar422) {
            iVar423 = 1;
            do {
              auVar559._0_4_ = *ptr1;
              auVar917._0_4_ = ptr1[1];
              auVar973._4_4_ = auVar917._0_4_;
              auVar973._0_4_ = auVar917._0_4_;
              auVar973._8_4_ = auVar917._0_4_;
              auVar973._12_4_ = auVar917._0_4_;
              auVar973._16_4_ = auVar917._0_4_;
              auVar973._20_4_ = auVar917._0_4_;
              auVar973._24_4_ = auVar917._0_4_;
              auVar973._28_4_ = auVar917._0_4_;
              auVar730 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                       CONCAT424(auVar559._0_4_,
                                                                 CONCAT420(auVar559._0_4_,
                                                                           CONCAT416(auVar559._0_4_,
                                                                                     CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar973,1);
              auVar730 = vsubps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
              *(undefined1 (*) [64])outptr = auVar730;
              ptr = (float *)((long)ptr + 0x40);
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar423 = iVar423 + 2;
            } while (iVar423 < (int)uVar422);
            uVar424 = uVar422 & 0x7ffffffe;
          }
          iVar423 = uVar422 - uVar424;
          if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
            do {
              auVar559._0_4_ = *ptr1;
              auVar899._4_4_ = auVar559._0_4_;
              auVar899._0_4_ = auVar559._0_4_;
              auVar899._8_4_ = auVar559._0_4_;
              auVar899._12_4_ = auVar559._0_4_;
              auVar899._16_4_ = auVar559._0_4_;
              auVar899._20_4_ = auVar559._0_4_;
              auVar899._24_4_ = auVar559._0_4_;
              auVar899._28_4_ = auVar559._0_4_;
              auVar671 = vsubps_avx(auVar899,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar423 = iVar423 + -1;
            } while (iVar423 != 0);
          }
        }
        if (iVar421 != 4) {
          return;
        }
        uVar424 = 0;
        if (3 < (int)uVar422) {
          iVar421 = 3;
          do {
            auVar559._0_4_ = ptr1[2];
            auVar900._4_4_ = auVar559._0_4_;
            auVar900._0_4_ = auVar559._0_4_;
            auVar900._8_4_ = auVar559._0_4_;
            auVar900._12_4_ = auVar559._0_4_;
            auVar559._0_4_ = ptr1[3];
            auVar900._20_4_ = auVar559._0_4_;
            auVar900._16_4_ = auVar559._0_4_;
            auVar900._24_4_ = auVar559._0_4_;
            auVar900._28_4_ = auVar559._0_4_;
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar730 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                                CONCAT48(auVar917._0_4_,
                                                                         CONCAT44(auVar917._0_4_,
                                                                                  auVar917._0_4_))),
                                                      CONCAT412(auVar559._0_4_,
                                                                CONCAT48(auVar559._0_4_,
                                                                         CONCAT44(auVar559._0_4_,
                                                                                  auVar559._0_4_))))
                                          ),auVar900,1);
            auVar730 = vsubps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 4;
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 4;
          } while (iVar421 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffc;
        }
        uVar872 = uVar424 | 1;
        while ((int)uVar872 < (int)uVar422) {
          auVar559._0_4_ = *ptr1;
          auVar901._4_4_ = auVar559._0_4_;
          auVar901._0_4_ = auVar559._0_4_;
          auVar901._8_4_ = auVar559._0_4_;
          auVar901._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[1];
          auVar901._20_4_ = auVar559._0_4_;
          auVar901._16_4_ = auVar559._0_4_;
          auVar901._24_4_ = auVar559._0_4_;
          auVar901._28_4_ = auVar559._0_4_;
          auVar671 = vsubps_avx(auVar901,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar872 = uVar424 + 3;
          uVar424 = uVar424 + 2;
        }
        iVar421 = uVar422 - uVar424;
        if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar425 = 0;
        do {
          uVar880 = *(undefined4 *)((long)ptr1 + lVar425);
          auVar887._4_4_ = uVar880;
          auVar887._0_4_ = uVar880;
          auVar887._8_4_ = uVar880;
          auVar887._12_4_ = uVar880;
          auVar462 = vsubps_avx(auVar887,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar425 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462;
          lVar425 = lVar425 + 4;
          iVar421 = iVar421 + -1;
        } while (iVar421 != 0);
        return;
      }
      if (bw == 1) {
        auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        if ((int)uVar424 < 0x10) {
          uVar422 = 0;
        }
        else {
          iVar421 = 0xf;
          do {
            auVar712 = vsubps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 0x10;
          } while (iVar421 < (int)uVar424);
          uVar422 = uVar424 & 0x7ffffff0;
          auVar730 = ZEXT464((uint)*ptr1);
        }
        auVar914._0_4_ = auVar730._0_4_;
        if ((int)(uVar422 | 7) < (int)uVar424) {
          auVar914._4_4_ = auVar914._0_4_;
          auVar914._8_4_ = auVar914._0_4_;
          auVar914._12_4_ = auVar914._0_4_;
          auVar914._16_4_ = auVar914._0_4_;
          auVar914._20_4_ = auVar914._0_4_;
          auVar914._24_4_ = auVar914._0_4_;
          auVar914._28_4_ = auVar914._0_4_;
          uVar872 = uVar422;
          do {
            auVar671 = vsubps_avx(auVar914,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar422 = uVar872 + 8;
            iVar421 = uVar872 + 0xf;
            uVar872 = uVar422;
          } while (iVar421 < (int)uVar424);
          auVar914._0_4_ = *ptr1;
        }
        if ((int)uVar424 <= (int)(uVar422 | 3)) {
          return;
        }
        auVar888._4_4_ = auVar914._0_4_;
        auVar888._0_4_ = auVar914._0_4_;
        auVar888._8_4_ = auVar914._0_4_;
        auVar888._12_4_ = auVar914._0_4_;
        lVar425 = 0;
        do {
          auVar462 = vsubps_avx(auVar888,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar425 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462;
          lVar425 = lVar425 + 4;
        } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar421 == 0x10) {
        auVar730 = *(undefined1 (*) [64])ptr;
        uVar424 = uVar422;
        do {
          auVar712 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar712 = vsubps_avx512f(auVar712,auVar730);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
        } while (uVar424 != 0);
      }
      if (iVar421 == 8) {
        auVar730 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        uVar424 = 0;
        if (1 < (int)uVar422) {
          iVar423 = 1;
          do {
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar1057._4_4_ = auVar917._0_4_;
            auVar1057._0_4_ = auVar917._0_4_;
            auVar1057._8_4_ = auVar917._0_4_;
            auVar1057._12_4_ = auVar917._0_4_;
            auVar1057._16_4_ = auVar917._0_4_;
            auVar1057._20_4_ = auVar917._0_4_;
            auVar1057._24_4_ = auVar917._0_4_;
            auVar1057._28_4_ = auVar917._0_4_;
            auVar712 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                     CONCAT424(auVar559._0_4_,
                                                               CONCAT420(auVar559._0_4_,
                                                                         CONCAT416(auVar559._0_4_,
                                                                                   CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar1057,1);
            auVar712 = vsubps_avx512f(auVar712,auVar730);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          do {
            auVar559._0_4_ = *ptr1;
            auVar990._4_4_ = auVar559._0_4_;
            auVar990._0_4_ = auVar559._0_4_;
            auVar990._8_4_ = auVar559._0_4_;
            auVar990._12_4_ = auVar559._0_4_;
            auVar990._16_4_ = auVar559._0_4_;
            auVar990._20_4_ = auVar559._0_4_;
            auVar990._24_4_ = auVar559._0_4_;
            auVar990._28_4_ = auVar559._0_4_;
            auVar671 = vsubps_avx(auVar990,auVar730._0_32_);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      if (iVar421 != 4) {
        return;
      }
      auVar730 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      uVar424 = 0;
      if (3 < (int)uVar422) {
        iVar421 = 3;
        do {
          auVar559._0_4_ = ptr1[2];
          auVar991._4_4_ = auVar559._0_4_;
          auVar991._0_4_ = auVar559._0_4_;
          auVar991._8_4_ = auVar559._0_4_;
          auVar991._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[3];
          auVar991._20_4_ = auVar559._0_4_;
          auVar991._16_4_ = auVar559._0_4_;
          auVar991._24_4_ = auVar559._0_4_;
          auVar991._28_4_ = auVar559._0_4_;
          auVar559._0_4_ = *ptr1;
          auVar917._0_4_ = ptr1[1];
          auVar712 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                              CONCAT48(auVar917._0_4_,
                                                                       CONCAT44(auVar917._0_4_,
                                                                                auVar917._0_4_))),
                                                    CONCAT412(auVar559._0_4_,
                                                              CONCAT48(auVar559._0_4_,
                                                                       CONCAT44(auVar559._0_4_,
                                                                                auVar559._0_4_))))),
                                auVar991,1);
          auVar712 = vsubps_avx512f(auVar712,auVar730);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      auVar462 = auVar730._0_16_;
      if ((int)(uVar424 | 1) < (int)uVar422) {
        auVar992._16_16_ = auVar462;
        auVar992._0_16_ = auVar462;
        uVar872 = uVar424;
        do {
          auVar559._0_4_ = *ptr1;
          auVar1058._4_4_ = auVar559._0_4_;
          auVar1058._0_4_ = auVar559._0_4_;
          auVar1058._8_4_ = auVar559._0_4_;
          auVar1058._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[1];
          auVar1058._20_4_ = auVar559._0_4_;
          auVar1058._16_4_ = auVar559._0_4_;
          auVar1058._24_4_ = auVar559._0_4_;
          auVar1058._28_4_ = auVar559._0_4_;
          auVar671 = vsubps_avx(auVar1058,auVar992);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar424 = uVar872 + 2;
          iVar421 = uVar872 + 3;
          uVar872 = uVar424;
        } while (iVar421 < (int)uVar422);
      }
      if ((int)uVar422 <= (int)uVar424) {
        return;
      }
      lVar425 = 0;
      do {
        auVar559._0_4_ = ptr1[lVar425];
        auVar955._4_4_ = auVar559._0_4_;
        auVar955._0_4_ = auVar559._0_4_;
        auVar955._8_4_ = auVar559._0_4_;
        auVar955._12_4_ = auVar559._0_4_;
        auVar492 = vsubps_avx(auVar955,auVar462);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar492;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        lVar425 = lVar425 + 1;
      } while (uVar422 - uVar424 != (int)lVar425);
      return;
    }
    if (aw == bw) {
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar730 = vsubps_avx512f(*(undefined1 (*) [64])ptr1,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar730;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar671 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,
                              *(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar462 = vsubps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,
                              *(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
             *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4) -
             *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003a20fc;
      auVar559._0_4_ = *ptr;
      if (iVar421 == 4) {
        auVar943 = *(undefined1 (*) [16])ptr;
        auVar730 = ZEXT3264(CONCAT1616(auVar943,auVar943));
      }
      else {
        auVar943._4_4_ = auVar559._0_4_;
        auVar943._0_4_ = auVar559._0_4_;
        auVar943._8_4_ = auVar559._0_4_;
        auVar943._12_4_ = auVar559._0_4_;
        if (iVar421 == 8) {
          auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar1079._4_4_ = auVar559._0_4_;
          auVar1079._0_4_ = auVar559._0_4_;
          auVar1079._8_4_ = auVar559._0_4_;
          auVar1079._12_4_ = auVar559._0_4_;
          auVar1079._16_4_ = auVar559._0_4_;
          auVar1079._20_4_ = auVar559._0_4_;
          auVar1079._24_4_ = auVar559._0_4_;
          auVar1079._28_4_ = auVar559._0_4_;
          auVar730 = ZEXT3264(auVar1079);
          if (iVar421 == 0x10) {
            auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_003ac858;
          }
        }
      }
      auVar1079 = auVar730._0_32_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar1079,1);
LAB_003ac858:
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar712 = vsubps_avx512f(*(undefined1 (*) [64])ptr1,auVar730);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar671 = vsubps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,auVar1079);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar462 = vsubps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,auVar943);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
             *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4) - auVar559._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    auVar559._0_4_ = *ptr1;
    if (iVar421 == 4) {
      auVar928 = *(undefined1 (*) [16])ptr1;
      auVar730 = ZEXT3264(CONCAT1616(auVar928,auVar928));
    }
    else {
      auVar928._4_4_ = auVar559._0_4_;
      auVar928._0_4_ = auVar559._0_4_;
      auVar928._8_4_ = auVar559._0_4_;
      auVar928._12_4_ = auVar559._0_4_;
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar1070._4_4_ = auVar559._0_4_;
        auVar1070._0_4_ = auVar559._0_4_;
        auVar1070._8_4_ = auVar559._0_4_;
        auVar1070._12_4_ = auVar559._0_4_;
        auVar1070._16_4_ = auVar559._0_4_;
        auVar1070._20_4_ = auVar559._0_4_;
        auVar1070._24_4_ = auVar559._0_4_;
        auVar1070._28_4_ = auVar559._0_4_;
        auVar730 = ZEXT3264(auVar1070);
        if (iVar421 == 0x10) {
          auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_003aa7e8;
        }
      }
    }
    auVar1070 = auVar730._0_32_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar1070,1);
LAB_003aa7e8:
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      iVar421 = 0xf;
      do {
        auVar712 = vsubps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])outptr = auVar712;
        ptr = (float *)((long)ptr + 0x40);
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
    }
    uVar872 = uVar422 | 7;
    while ((int)uVar872 < (int)uVar424) {
      auVar671 = vsubps_avx(auVar1070,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
      *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      uVar872 = uVar422 + 0xf;
      uVar422 = uVar422 + 8;
    }
    uVar872 = uVar422 | 3;
    while ((int)uVar872 < (int)uVar424) {
      auVar462 = vsubps_avx(auVar928,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      uVar872 = uVar422 + 7;
      uVar422 = uVar422 + 4;
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      ::_ps512_1[0] = ::_ps512_1[0];
      ::_ps512_1[1] = ::_ps512_1[1];
      ::_ps512_1[2] = ::_ps512_1[2];
      ::_ps512_1[3] = ::_ps512_1[3];
      ::_ps512_1[4] = ::_ps512_1[4];
      ::_ps512_1[5] = ::_ps512_1[5];
      ::_ps512_1[6] = ::_ps512_1[6];
      ::_ps512_1[7] = ::_ps512_1[7];
      ::_ps512_1[8] = ::_ps512_1[8];
      ::_ps512_1[9] = ::_ps512_1[9];
      ::_ps512_1[10] = ::_ps512_1[10];
      ::_ps512_1[0xb] = ::_ps512_1[0xb];
      ::_ps512_1[0xc] = ::_ps512_1[0xc];
      ::_ps512_1[0xd] = ::_ps512_1[0xd];
      ::_ps512_1[0xe] = ::_ps512_1[0xe];
      ::_ps512_1[0xf] = ::_ps512_1[0xf];
      ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
      ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
      ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
      ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
      ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
      ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
      ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
      ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
      ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
      ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
      ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
      ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
      ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
      ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
      ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
      ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
      ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
      ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
      ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
      ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
      ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
      ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
      ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
      ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
      ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
      ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
      ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
      ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
      ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
      ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
      ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
      ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
      ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
      ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
      ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
      ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
      ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
      ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
      ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
      ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
      ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
      ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
      ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
      ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
      ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
      ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
      ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
      ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
      ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
      ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
      ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
      ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
      ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
      ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
      ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
      ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
      ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
      ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
      ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
      ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
      ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
      ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
      ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
      ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
      ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
      ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
      ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
      ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
      ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
      ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
      ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
      ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
      ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
      ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
      ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
      ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
      ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
      ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
      ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
      ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
      ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
      ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
      ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
      ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
      ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
      ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
      ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
      ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
      ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
      ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
      ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
      ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
      ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
      ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
      ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
      ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
      ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
      ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
      ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
      ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
      ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
      ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
      ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
      ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
      ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
      ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
      ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
      ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
      ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
      ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
      ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
      ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
      ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
      ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
      ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
      ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
      ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
      ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
      ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
      ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
      ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
      ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
      ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
      ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
      ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
      ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
      ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
      ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
      ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
      ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
      ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
      ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
      ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
      ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
      ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
      ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
      ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
      ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
      ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
      ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
      ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
      ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
      ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
      ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
      ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
      ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
      ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
      ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
      ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
      ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
      ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
      ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
      ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
      ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
      ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
      ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
      ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
      ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
      ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
      ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
      _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
      _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
      _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
      _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
      _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
      _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
      _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
      _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
      _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
      _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
      _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
      _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
      _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
      _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
      _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
      _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
      _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
      _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
      _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
      _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
      _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
      _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
      _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
      _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
      _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
      _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
      _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
      _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
      _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
      _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
      _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
      _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
      _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
      _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
      _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
      _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
      _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
      _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
      _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
      _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
      _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
      _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
      _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
      _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
      _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
      _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
      _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
      _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
      _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
      _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
      _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
      _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
      _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
      _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
      _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
      _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
      _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
      _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
      _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
      _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
      _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
      _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
      _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
      _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
      _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
      _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
      _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
      _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
      _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
      _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
      _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
      _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
      _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
      _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
      _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
      _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
      _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
      _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
      _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
      _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
      _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
      _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
      _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
      _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
      _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
      _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
      _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
      _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
      _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
      _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
      _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
      _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
      _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
      _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
      _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
      _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
      _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
      _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
      _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
      _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
      _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
      _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
      _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
      _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
      _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
      _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
      _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
      _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
      _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
      _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
      _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
      _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
      _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
      _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
      _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
      _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
      _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
      _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
      _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
      _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
      _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
      _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
      _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
      _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
      _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
      _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
      _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
      _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
      _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
      _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
      _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
      _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
      _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
      _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
      _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
      _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
      _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
      _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
      _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
      _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
      _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
      _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
      _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
      _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
      _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
      _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
      _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
      _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
      _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
      _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
      _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
      _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
      _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
      _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
      _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
      _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
      _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
      _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
      _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
      _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
      _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
      _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
      _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
      _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
      _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
      _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
      _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
      _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
      _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
      _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
      _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
      _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
      _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
      _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
      _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
      _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
      _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
      _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
      _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
      _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
      _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
      _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
      _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
      _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
      _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
      _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
      _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
      _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
      _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
      _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
      _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
      _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
      _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
      _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
      _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
      _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
      _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
      _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
      _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
      _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
      _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
      _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
      _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
      _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
      _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
      _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
      _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
      _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
      _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
      _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
      _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
      _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
      _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
      _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
      _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
      _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
      _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
      _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
      _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
      _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
      _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
      _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
      _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
      _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
      return;
    }
    lVar425 = 0;
    do {
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
           auVar559._0_4_ - *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  case 8:
    uVar422 = bw;
    if (bw < aw) {
      uVar422 = aw;
    }
    iVar421 = bp;
    if (bp < ap) {
      iVar421 = ap;
    }
    uVar424 = iVar421 * uVar422;
    if (ap != bp) {
LAB_003a4bea:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        uVar424 = uVar422;
        if (0 < (int)uVar422 && iVar421 == 0x10) {
          do {
            auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar730 = vdivps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar424 = uVar424 - 1;
          } while (uVar424 != 0);
        }
        if (iVar421 == 8) {
          uVar424 = 0;
          if (1 < (int)uVar422) {
            iVar423 = 1;
            do {
              auVar559._0_4_ = *ptr1;
              auVar917._0_4_ = ptr1[1];
              auVar983._4_4_ = auVar917._0_4_;
              auVar983._0_4_ = auVar917._0_4_;
              auVar983._8_4_ = auVar917._0_4_;
              auVar983._12_4_ = auVar917._0_4_;
              auVar983._16_4_ = auVar917._0_4_;
              auVar983._20_4_ = auVar917._0_4_;
              auVar983._24_4_ = auVar917._0_4_;
              auVar983._28_4_ = auVar917._0_4_;
              auVar730 = vinsertf64x4_avx512f
                                   (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                       CONCAT424(auVar559._0_4_,
                                                                 CONCAT420(auVar559._0_4_,
                                                                           CONCAT416(auVar559._0_4_,
                                                                                     CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar983,1);
              auVar730 = vdivps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
              ptr = (float *)((long)ptr + 0x40);
              *(undefined1 (*) [64])outptr = auVar730;
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar423 = iVar423 + 2;
            } while (iVar423 < (int)uVar422);
            uVar424 = uVar422 & 0x7ffffffe;
          }
          iVar423 = uVar422 - uVar424;
          if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
            do {
              auVar559._0_4_ = *ptr1;
              auVar907._4_4_ = auVar559._0_4_;
              auVar907._0_4_ = auVar559._0_4_;
              auVar907._8_4_ = auVar559._0_4_;
              auVar907._12_4_ = auVar559._0_4_;
              auVar907._16_4_ = auVar559._0_4_;
              auVar907._20_4_ = auVar559._0_4_;
              auVar907._24_4_ = auVar559._0_4_;
              auVar907._28_4_ = auVar559._0_4_;
              auVar671 = vdivps_avx(auVar907,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar423 = iVar423 + -1;
            } while (iVar423 != 0);
          }
        }
        if (iVar421 != 4) {
          return;
        }
        uVar424 = 0;
        if (3 < (int)uVar422) {
          iVar421 = 3;
          do {
            auVar559._0_4_ = ptr1[2];
            auVar908._4_4_ = auVar559._0_4_;
            auVar908._0_4_ = auVar559._0_4_;
            auVar908._8_4_ = auVar559._0_4_;
            auVar908._12_4_ = auVar559._0_4_;
            auVar559._0_4_ = ptr1[3];
            auVar908._20_4_ = auVar559._0_4_;
            auVar908._16_4_ = auVar559._0_4_;
            auVar908._24_4_ = auVar559._0_4_;
            auVar908._28_4_ = auVar559._0_4_;
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar730 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                                CONCAT48(auVar917._0_4_,
                                                                         CONCAT44(auVar917._0_4_,
                                                                                  auVar917._0_4_))),
                                                      CONCAT412(auVar559._0_4_,
                                                                CONCAT48(auVar559._0_4_,
                                                                         CONCAT44(auVar559._0_4_,
                                                                                  auVar559._0_4_))))
                                          ),auVar908,1);
            auVar730 = vdivps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            ptr = (float *)((long)ptr + 0x40);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr1 = ptr1 + 4;
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 4;
          } while (iVar421 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffc;
        }
        uVar872 = uVar424 | 1;
        while ((int)uVar872 < (int)uVar422) {
          auVar559._0_4_ = *ptr1;
          auVar909._4_4_ = auVar559._0_4_;
          auVar909._0_4_ = auVar559._0_4_;
          auVar909._8_4_ = auVar559._0_4_;
          auVar909._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[1];
          auVar909._20_4_ = auVar559._0_4_;
          auVar909._16_4_ = auVar559._0_4_;
          auVar909._24_4_ = auVar559._0_4_;
          auVar909._28_4_ = auVar559._0_4_;
          auVar671 = vdivps_avx(auVar909,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar872 = uVar424 + 3;
          uVar424 = uVar424 + 2;
        }
        iVar421 = uVar422 - uVar424;
        if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
          ::_ps512_1[0] = ::_ps512_1[0];
          ::_ps512_1[1] = ::_ps512_1[1];
          ::_ps512_1[2] = ::_ps512_1[2];
          ::_ps512_1[3] = ::_ps512_1[3];
          ::_ps512_1[4] = ::_ps512_1[4];
          ::_ps512_1[5] = ::_ps512_1[5];
          ::_ps512_1[6] = ::_ps512_1[6];
          ::_ps512_1[7] = ::_ps512_1[7];
          ::_ps512_1[8] = ::_ps512_1[8];
          ::_ps512_1[9] = ::_ps512_1[9];
          ::_ps512_1[10] = ::_ps512_1[10];
          ::_ps512_1[0xb] = ::_ps512_1[0xb];
          ::_ps512_1[0xc] = ::_ps512_1[0xc];
          ::_ps512_1[0xd] = ::_ps512_1[0xd];
          ::_ps512_1[0xe] = ::_ps512_1[0xe];
          ::_ps512_1[0xf] = ::_ps512_1[0xf];
          ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
          ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
          ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
          ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
          ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
          ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
          ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
          ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
          ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
          ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
          ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
          ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
          ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
          ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
          ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
          ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
          ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
          ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
          ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
          ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
          ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
          ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
          ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
          ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
          ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
          ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
          ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
          ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
          ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
          ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
          ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
          ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
          ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
          ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
          ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
          ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
          ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
          ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
          ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
          ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
          ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
          ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
          ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
          ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
          ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
          ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
          ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
          ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
          ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
          ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
          ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
          ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
          ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
          ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
          ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
          ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
          ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
          ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
          ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
          ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
          ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
          ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
          ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
          ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
          ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
          ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
          ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
          ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
          ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
          ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
          ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
          ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
          ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
          ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
          ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
          ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
          ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
          ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
          ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
          ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
          ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
          ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
          ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
          ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
          ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
          ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
          ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
          ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
          ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
          ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
          ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
          ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
          ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
          ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
          ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
          ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
          ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
          ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
          ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
          ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
          ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
          ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
          ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
          ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
          ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
          ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
          ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
          ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
          ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
          ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
          ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
          ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
          ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
          ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
          ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
          ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
          ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
          ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
          ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
          ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
          ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
          ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
          ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
          ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
          ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
          ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
          ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
          ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
          ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
          ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
          ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
          ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
          ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
          ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
          ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
          ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
          ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
          ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
          ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
          ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
          ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
          ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
          ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
          ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
          ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
          ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
          ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
          ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
          ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
          ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
          ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
          ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
          ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
          ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
          ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
          ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
          ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
          ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
          ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
          ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
          _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
          _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
          _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
          _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
          _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
          _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
          _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
          _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
          _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
          _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
          _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
          _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
          _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
          _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
          _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
          _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
          _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
          _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
          _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
          _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
          _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
          _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
          _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
          _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
          _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
          _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
          _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
          _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
          _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
          _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
          _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
          _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
          _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
          _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
          _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
          _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
          _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
          _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
          _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
          _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
          _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
          _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
          _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
          _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
          _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
          _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
          _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
          _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
          _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
          _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
          _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
          _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
          _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
          _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
          _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
          _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
          _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
          _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
          _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
          _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
          _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
          _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
          _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
          _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
          _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
          _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
          _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
          _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
          _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
          _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
          _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
          _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
          _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
          _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
          _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
          _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
          _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
          _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
          _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
          _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
          _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
          _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
          _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
          _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
          _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
          _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
          _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
          _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
          _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
          _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
          _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
          _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
          _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
          _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
          _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
          _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
          _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
          _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
          _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
          _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
          _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
          _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
          _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
          _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
          _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
          _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
          _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
          _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
          _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
          _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
          _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
          _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
          _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
          _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
          _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
          _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
          _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
          _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
          _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
          _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
          _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
          _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
          _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
          _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
          _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
          _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
          _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
          _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
          _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
          _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
          _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
          _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
          _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
          _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
          _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
          _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
          _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
          _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
          _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
          _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
          _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
          _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
          _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
          _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
          _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
          _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
          _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
          _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
          _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
          _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
          _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
          _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
          _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
          _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
          _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
          _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
          _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
          _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
          _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
          _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
          _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
          _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
          _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
          _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
          _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
          _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
          _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
          _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
          _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
          _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
          _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
          _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
          _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
          _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
          _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
          _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
          _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
          _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
          _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
          _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
          _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
          _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
          _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
          _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
          _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
          _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
          _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
          _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
          _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
          _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
          _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
          _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
          _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
          _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
          _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
          _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
          _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
          _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
          _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
          _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
          _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
          _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
          _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
          _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
          _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
          _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
          _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
          _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
          _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
          _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
          _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
          _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
          _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
          _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
          _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
          _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
          _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
          _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
          _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
          _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
          _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
          _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
          _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
          _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
          return;
        }
        lVar425 = 0;
        do {
          uVar880 = *(undefined4 *)((long)ptr1 + lVar425);
          auVar892._4_4_ = uVar880;
          auVar892._0_4_ = uVar880;
          auVar892._8_4_ = uVar880;
          auVar892._12_4_ = uVar880;
          auVar462 = vdivps_avx(auVar892,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar425 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462;
          lVar425 = lVar425 + 4;
          iVar421 = iVar421 + -1;
        } while (iVar421 != 0);
        return;
      }
      if (bw == 1) {
        auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        if ((int)uVar424 < 0x10) {
          uVar422 = 0;
        }
        else {
          iVar421 = 0xf;
          do {
            auVar712 = vdivps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 0x10;
          } while (iVar421 < (int)uVar424);
          uVar422 = uVar424 & 0x7ffffff0;
          auVar730 = ZEXT464((uint)*ptr1);
        }
        auVar917._0_4_ = auVar730._0_4_;
        if ((int)(uVar422 | 7) < (int)uVar424) {
          auVar917._4_4_ = auVar917._0_4_;
          auVar917._8_4_ = auVar917._0_4_;
          auVar917._12_4_ = auVar917._0_4_;
          auVar917._16_4_ = auVar917._0_4_;
          auVar917._20_4_ = auVar917._0_4_;
          auVar917._24_4_ = auVar917._0_4_;
          auVar917._28_4_ = auVar917._0_4_;
          uVar872 = uVar422;
          do {
            auVar671 = vdivps_avx(auVar917,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar422 = uVar872 + 8;
            iVar421 = uVar872 + 0xf;
            uVar872 = uVar422;
          } while (iVar421 < (int)uVar424);
          auVar917._0_4_ = *ptr1;
        }
        if ((int)uVar424 <= (int)(uVar422 | 3)) {
          return;
        }
        auVar893._4_4_ = auVar917._0_4_;
        auVar893._0_4_ = auVar917._0_4_;
        auVar893._8_4_ = auVar917._0_4_;
        auVar893._12_4_ = auVar917._0_4_;
        lVar425 = 0;
        do {
          auVar462 = vdivps_avx(auVar893,*(undefined1 (*) [16])
                                          (*(undefined1 (*) [64])ptr + lVar425 * 4));
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar462;
          lVar425 = lVar425 + 4;
        } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar421 == 0x10) {
        auVar730 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar730 = vdivps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
        uVar424 = uVar422;
        do {
          auVar559._0_4_ = *ptr1;
          auVar358._4_4_ = auVar559._0_4_;
          auVar358._0_4_ = auVar559._0_4_;
          auVar358._8_4_ = auVar559._0_4_;
          auVar358._12_4_ = auVar559._0_4_;
          auVar358._16_4_ = auVar559._0_4_;
          auVar358._20_4_ = auVar559._0_4_;
          auVar358._24_4_ = auVar559._0_4_;
          auVar358._28_4_ = auVar559._0_4_;
          auVar358._32_4_ = auVar559._0_4_;
          auVar358._36_4_ = auVar559._0_4_;
          auVar358._40_4_ = auVar559._0_4_;
          auVar358._44_4_ = auVar559._0_4_;
          auVar358._48_4_ = auVar559._0_4_;
          auVar358._52_4_ = auVar559._0_4_;
          auVar358._56_4_ = auVar559._0_4_;
          auVar358._60_4_ = auVar559._0_4_;
          auVar712 = vmulps_avx512f(auVar730,auVar358);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
        } while (uVar424 != 0);
      }
      if (iVar421 == 8) {
        auVar671 = *(undefined1 (*) [32])ptr;
        uVar424 = 0;
        if (1 < (int)uVar422) {
          auVar730 = vinsertf64x4_avx512f(ZEXT3264(auVar671),auVar671,1);
          auVar712 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar730 = vdivps_avx512f(auVar712,auVar730);
          iVar423 = 1;
          do {
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar1128._4_4_ = auVar917._0_4_;
            auVar1128._0_4_ = auVar917._0_4_;
            auVar1128._8_4_ = auVar917._0_4_;
            auVar1128._12_4_ = auVar917._0_4_;
            auVar1128._16_4_ = auVar917._0_4_;
            auVar1128._20_4_ = auVar917._0_4_;
            auVar1128._24_4_ = auVar917._0_4_;
            auVar1128._28_4_ = auVar917._0_4_;
            auVar712 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                     CONCAT424(auVar559._0_4_,
                                                               CONCAT420(auVar559._0_4_,
                                                                         CONCAT416(auVar559._0_4_,
                                                                                   CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar1128,1);
            auVar712 = vmulps_avx512f(auVar712,auVar730);
            *(undefined1 (*) [64])outptr = auVar712;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          auVar1001._8_4_ = 0x3f800000;
          auVar1001._0_8_ = 0x3f8000003f800000;
          auVar1001._12_4_ = 0x3f800000;
          auVar1001._16_4_ = 0x3f800000;
          auVar1001._20_4_ = 0x3f800000;
          auVar1001._24_4_ = 0x3f800000;
          auVar1001._28_4_ = 0x3f800000;
          auVar671 = vdivps_avx(auVar1001,auVar671);
          do {
            auVar559._0_4_ = *ptr1;
            auVar253._4_4_ = auVar559._0_4_;
            auVar253._0_4_ = auVar559._0_4_;
            auVar253._8_4_ = auVar559._0_4_;
            auVar253._12_4_ = auVar559._0_4_;
            auVar253._16_4_ = auVar559._0_4_;
            auVar253._20_4_ = auVar559._0_4_;
            auVar253._24_4_ = auVar559._0_4_;
            auVar253._28_4_ = auVar559._0_4_;
            auVar672 = vmulps_avx512vl(auVar671,auVar253);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar672;
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      if (iVar421 != 4) {
        return;
      }
      auVar462 = *(undefined1 (*) [16])ptr;
      auVar912._16_16_ = auVar462;
      auVar912._0_16_ = auVar462;
      uVar424 = 0;
      if (3 < (int)uVar422) {
        auVar730 = vinserti64x4_avx512f(ZEXT3264(auVar912),auVar912,1);
        auVar712 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar730 = vdivps_avx512f(auVar712,auVar730);
        iVar421 = 3;
        do {
          auVar559._0_4_ = ptr1[2];
          auVar1065._4_4_ = auVar559._0_4_;
          auVar1065._0_4_ = auVar559._0_4_;
          auVar1065._8_4_ = auVar559._0_4_;
          auVar1065._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[3];
          auVar1065._20_4_ = auVar559._0_4_;
          auVar1065._16_4_ = auVar559._0_4_;
          auVar1065._24_4_ = auVar559._0_4_;
          auVar1065._28_4_ = auVar559._0_4_;
          auVar559._0_4_ = *ptr1;
          auVar917._0_4_ = ptr1[1];
          auVar712 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                              CONCAT48(auVar917._0_4_,
                                                                       CONCAT44(auVar917._0_4_,
                                                                                auVar917._0_4_))),
                                                    CONCAT412(auVar559._0_4_,
                                                              CONCAT48(auVar559._0_4_,
                                                                       CONCAT44(auVar559._0_4_,
                                                                                auVar559._0_4_))))),
                                auVar1065,1);
          auVar712 = vmulps_avx512f(auVar712,auVar730);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      if ((int)(uVar424 | 1) < (int)uVar422) {
        auVar1002._8_4_ = 0x3f800000;
        auVar1002._0_8_ = 0x3f8000003f800000;
        auVar1002._12_4_ = 0x3f800000;
        auVar1002._16_4_ = 0x3f800000;
        auVar1002._20_4_ = 0x3f800000;
        auVar1002._24_4_ = 0x3f800000;
        auVar1002._28_4_ = 0x3f800000;
        auVar671 = vdivps_avx(auVar1002,auVar912);
        uVar872 = uVar424;
        do {
          auVar559._0_4_ = *ptr1;
          auVar917._0_4_ = ptr1[1];
          *(float *)*(undefined1 (*) [64])outptr = auVar559._0_4_ * auVar671._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ * auVar671._4_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar559._0_4_ * auVar671._8_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar559._0_4_ * auVar671._12_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar917._0_4_ * auVar671._16_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar917._0_4_ * auVar671._20_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar917._0_4_ * auVar671._24_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar917._0_4_;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar424 = uVar872 + 2;
          iVar421 = uVar872 + 3;
          uVar872 = uVar424;
        } while (iVar421 < (int)uVar422);
      }
      if ((int)uVar422 <= (int)uVar424) {
        return;
      }
      auVar957._8_4_ = 0x3f800000;
      auVar957._0_8_ = 0x3f8000003f800000;
      auVar957._12_4_ = 0x3f800000;
      auVar462 = vdivps_avx(auVar957,auVar462);
      lVar425 = 0;
      do {
        auVar559._0_4_ = ptr1[lVar425];
        auVar115._4_4_ = auVar559._0_4_;
        auVar115._0_4_ = auVar559._0_4_;
        auVar115._8_4_ = auVar559._0_4_;
        auVar115._12_4_ = auVar559._0_4_;
        auVar492 = vmulps_avx512vl(auVar462,auVar115);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar492;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        lVar425 = lVar425 + 1;
      } while (uVar422 - uVar424 != (int)lVar425);
      return;
    }
    if (aw == bw) {
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        do {
          auVar730 = vdivps_avx512f(*(undefined1 (*) [64])ptr1,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar730;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      uVar872 = uVar422 | 7;
      while ((int)uVar872 < (int)uVar424) {
        auVar671 = vdivps_avx(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,
                              *(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar422 + 0xf;
        uVar422 = uVar422 + 8;
      }
      uVar872 = uVar422 | 3;
      while ((int)uVar872 < (int)uVar424) {
        auVar462 = vdivps_avx(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,
                              *(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar872 = uVar422 + 7;
        uVar422 = uVar422 + 4;
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
             *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4) /
             *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003a4bea;
      auVar559._0_4_ = *ptr;
      if (iVar421 == 4) {
        auVar950 = *(undefined1 (*) [16])ptr;
        auVar730 = ZEXT3264(CONCAT1616(auVar950,auVar950));
      }
      else {
        auVar950._4_4_ = auVar559._0_4_;
        auVar950._0_4_ = auVar559._0_4_;
        auVar950._8_4_ = auVar559._0_4_;
        auVar950._12_4_ = auVar559._0_4_;
        if (iVar421 == 8) {
          auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar1084._4_4_ = auVar559._0_4_;
          auVar1084._0_4_ = auVar559._0_4_;
          auVar1084._8_4_ = auVar559._0_4_;
          auVar1084._12_4_ = auVar559._0_4_;
          auVar1084._16_4_ = auVar559._0_4_;
          auVar1084._20_4_ = auVar559._0_4_;
          auVar1084._24_4_ = auVar559._0_4_;
          auVar1084._28_4_ = auVar559._0_4_;
          auVar730 = ZEXT3264(auVar1084);
          if (iVar421 == 0x10) {
            auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_003ad741;
          }
        }
      }
      auVar1084 = auVar730._0_32_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar1084,1);
LAB_003ad741:
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        auVar712 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar730 = vdivps_avx512f(auVar712,auVar730);
        iVar421 = 0xf;
        do {
          auVar712 = vmulps_avx512f(auVar730,*(undefined1 (*) [64])ptr1);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      if ((int)(uVar422 | 7) < (int)uVar424) {
        auVar1137._8_4_ = 0x3f800000;
        auVar1137._0_8_ = 0x3f8000003f800000;
        auVar1137._12_4_ = 0x3f800000;
        auVar1137._16_4_ = 0x3f800000;
        auVar1137._20_4_ = 0x3f800000;
        auVar1137._24_4_ = 0x3f800000;
        auVar1137._28_4_ = 0x3f800000;
        auVar671 = vdivps_avx(auVar1137,auVar1084);
        uVar872 = uVar422;
        do {
          auVar396._4_4_ = auVar671._4_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          auVar396._0_4_ = auVar671._0_4_ * *(float *)*(undefined1 (*) [64])ptr1;
          auVar396._8_4_ = auVar671._8_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          auVar396._12_4_ = auVar671._12_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          auVar396._16_4_ = auVar671._16_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          auVar396._20_4_ = auVar671._20_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
          auVar396._24_4_ = auVar671._24_4_ * *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
          auVar396._28_4_ = auVar1137._28_4_;
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar396;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar422 = uVar872 + 8;
          iVar421 = uVar872 + 0xf;
          uVar872 = uVar422;
          auVar1137 = auVar396;
        } while (iVar421 < (int)uVar424);
      }
      if ((int)(uVar422 | 3) < (int)uVar424) {
        auVar1033._8_4_ = 0x3f800000;
        auVar1033._0_8_ = 0x3f8000003f800000;
        auVar1033._12_4_ = 0x3f800000;
        auVar462 = vdivps_avx(auVar1033,auVar950);
        uVar872 = uVar422;
        do {
          auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
          auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
          auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
          *(float *)*(undefined1 (*) [64])outptr =
               auVar462._0_4_ * *(float *)*(undefined1 (*) [64])ptr1;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar462._4_4_ * auVar917._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar462._8_4_ * auVar914._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar462._12_4_ * auVar916._0_4_;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar422 = uVar872 + 4;
          iVar421 = uVar872 + 7;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        return;
      }
      lVar425 = 0;
      do {
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
             (1.0 / auVar559._0_4_) * *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4);
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    auVar559._0_4_ = *ptr1;
    if (iVar421 == 4) {
      auVar932 = *(undefined1 (*) [16])ptr1;
      auVar730 = ZEXT3264(CONCAT1616(auVar932,auVar932));
    }
    else {
      auVar932._4_4_ = auVar559._0_4_;
      auVar932._0_4_ = auVar559._0_4_;
      auVar932._8_4_ = auVar559._0_4_;
      auVar932._12_4_ = auVar559._0_4_;
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar1075._4_4_ = auVar559._0_4_;
        auVar1075._0_4_ = auVar559._0_4_;
        auVar1075._8_4_ = auVar559._0_4_;
        auVar1075._12_4_ = auVar559._0_4_;
        auVar1075._16_4_ = auVar559._0_4_;
        auVar1075._20_4_ = auVar559._0_4_;
        auVar1075._24_4_ = auVar559._0_4_;
        auVar1075._28_4_ = auVar559._0_4_;
        auVar730 = ZEXT3264(auVar1075);
        if (iVar421 == 0x10) {
          auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_003ab876;
        }
      }
    }
    auVar1075 = auVar730._0_32_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar1075,1);
LAB_003ab876:
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      iVar421 = 0xf;
      do {
        auVar712 = vdivps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])outptr = auVar712;
        ptr = (float *)((long)ptr + 0x40);
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
    }
    uVar872 = uVar422 | 7;
    while ((int)uVar872 < (int)uVar424) {
      auVar671 = vdivps_avx(auVar1075,*(undefined1 (*) [32])*(undefined1 (*) [64])ptr);
      *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      uVar872 = uVar422 + 0xf;
      uVar422 = uVar422 + 8;
    }
    uVar872 = uVar422 | 3;
    while ((int)uVar872 < (int)uVar424) {
      auVar462 = vdivps_avx(auVar932,*(undefined1 (*) [16])*(undefined1 (*) [64])ptr);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      uVar872 = uVar422 + 7;
      uVar422 = uVar422 + 4;
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      ::_ps512_1[0] = ::_ps512_1[0];
      ::_ps512_1[1] = ::_ps512_1[1];
      ::_ps512_1[2] = ::_ps512_1[2];
      ::_ps512_1[3] = ::_ps512_1[3];
      ::_ps512_1[4] = ::_ps512_1[4];
      ::_ps512_1[5] = ::_ps512_1[5];
      ::_ps512_1[6] = ::_ps512_1[6];
      ::_ps512_1[7] = ::_ps512_1[7];
      ::_ps512_1[8] = ::_ps512_1[8];
      ::_ps512_1[9] = ::_ps512_1[9];
      ::_ps512_1[10] = ::_ps512_1[10];
      ::_ps512_1[0xb] = ::_ps512_1[0xb];
      ::_ps512_1[0xc] = ::_ps512_1[0xc];
      ::_ps512_1[0xd] = ::_ps512_1[0xd];
      ::_ps512_1[0xe] = ::_ps512_1[0xe];
      ::_ps512_1[0xf] = ::_ps512_1[0xf];
      ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
      ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
      ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
      ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
      ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
      ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
      ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
      ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
      ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
      ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
      ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
      ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
      ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
      ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
      ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
      ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
      ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
      ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
      ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
      ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
      ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
      ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
      ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
      ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
      ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
      ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
      ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
      ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
      ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
      ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
      ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
      ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
      ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
      ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
      ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
      ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
      ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
      ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
      ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
      ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
      ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
      ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
      ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
      ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
      ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
      ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
      ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
      ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
      ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
      ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
      ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
      ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
      ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
      ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
      ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
      ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
      ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
      ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
      ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
      ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
      ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
      ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
      ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
      ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
      ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
      ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
      ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
      ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
      ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
      ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
      ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
      ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
      ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
      ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
      ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
      ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
      ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
      ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
      ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
      ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
      ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
      ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
      ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
      ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
      ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
      ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
      ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
      ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
      ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
      ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
      ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
      ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
      ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
      ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
      ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
      ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
      ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
      ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
      ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
      ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
      ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
      ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
      ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
      ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
      ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
      ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
      ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
      ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
      ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
      ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
      ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
      ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
      ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
      ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
      ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
      ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
      ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
      ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
      ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
      ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
      ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
      ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
      ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
      ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
      ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
      ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
      ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
      ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
      ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
      ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
      ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
      ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
      ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
      ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
      ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
      ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
      ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
      ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
      ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
      ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
      ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
      ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
      ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
      ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
      ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
      ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
      ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
      ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
      ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
      ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
      ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
      ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
      ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
      ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
      ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
      ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
      ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
      ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
      ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
      ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
      _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
      _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
      _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
      _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
      _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
      _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
      _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
      _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
      _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
      _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
      _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
      _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
      _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
      _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
      _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
      _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
      _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
      _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
      _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
      _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
      _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
      _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
      _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
      _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
      _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
      _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
      _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
      _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
      _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
      _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
      _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
      _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
      _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
      _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
      _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
      _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
      _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
      _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
      _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
      _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
      _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
      _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
      _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
      _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
      _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
      _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
      _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
      _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
      _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
      _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
      _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
      _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
      _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
      _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
      _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
      _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
      _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
      _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
      _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
      _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
      _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
      _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
      _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
      _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
      _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
      _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
      _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
      _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
      _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
      _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
      _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
      _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
      _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
      _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
      _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
      _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
      _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
      _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
      _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
      _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
      _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
      _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
      _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
      _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
      _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
      _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
      _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
      _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
      _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
      _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
      _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
      _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
      _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
      _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
      _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
      _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
      _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
      _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
      _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
      _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
      _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
      _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
      _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
      _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
      _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
      _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
      _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
      _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
      _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
      _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
      _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
      _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
      _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
      _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
      _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
      _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
      _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
      _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
      _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
      _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
      _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
      _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
      _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
      _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
      _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
      _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
      _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
      _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
      _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
      _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
      _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
      _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
      _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
      _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
      _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
      _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
      _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
      _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
      _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
      _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
      _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
      _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
      _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
      _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
      _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
      _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
      _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
      _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
      _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
      _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
      _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
      _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
      _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
      _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
      _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
      _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
      _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
      _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
      _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
      _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
      _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
      _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
      _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
      _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
      _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
      _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
      _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
      _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
      _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
      _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
      _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
      _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
      _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
      _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
      _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
      _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
      _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
      _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
      _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
      _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
      _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
      _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
      _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
      _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
      _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
      _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
      _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
      _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
      _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
      _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
      _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
      _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
      _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
      _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
      _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
      _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
      _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
      _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
      _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
      _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
      _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
      _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
      _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
      _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
      _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
      _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
      _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
      _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
      _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
      _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
      _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
      _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
      _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
      _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
      _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
      _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
      _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
      _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
      _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
      _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
      _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
      _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
      _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
      _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
      return;
    }
    lVar425 = 0;
    do {
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
           auVar559._0_4_ / *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  case 9:
    uVar422 = bw;
    if (bw < aw) {
      uVar422 = aw;
    }
    iVar421 = bp;
    if (bp < ap) {
      iVar421 = ap;
    }
    uVar424 = iVar421 * uVar422;
    if (ap != bp) {
LAB_003a0a9f:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (0 < (int)uVar422 && iVar421 == 0x10) {
          in_ZMM3 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar730 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar713 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar714 = vpxord_avx512f(in_ZMM3,auVar712);
          auVar715 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar716 = vpxord_avx512f(auVar715,auVar712);
          auVar712 = vpxord_avx512f(auVar713,auVar712);
          auVar504 = vxorps_avx512vl(auVar504,auVar504);
          in_ZMM29 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          uVar424 = uVar422;
          do {
            auVar717 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar718 = vmaxps_avx512f(auVar717,(undefined1  [64])_ps512_min_norm_pos);
            auVar719 = vpsrld_avx512f(auVar718,0x17);
            auVar718 = vpternlogd_avx512f(auVar718,in_ZMM3,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar46 = vcmpps_avx512f(auVar718,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar720 = vsubps_avx512f(auVar718,(undefined1  [64])afVar404);
            auVar718 = vaddps_avx512f(auVar720,auVar718);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar758._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar720._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar758._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar720._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar758._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar720._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar758._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar720._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar758._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar720._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar758._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar720._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar758._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar720._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar758._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar720._28_4_;
            bVar28 = (byte)(uVar46 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar758._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar720._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar758._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar720._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar758._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar720._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar758._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar720._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar758._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar720._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar758._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar720._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar758._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar720._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar758._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar720._60_4_;
            auVar718 = vfmadd132ps_avx512f(auVar758,(undefined1  [64])afVar413,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar758,(undefined1  [64])afVar414);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar758,(undefined1  [64])afVar415);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar758,(undefined1  [64])afVar416);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar758,(undefined1  [64])afVar417);
            auVar720 = vmulps_avx512f(auVar758,auVar758);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar758,(undefined1  [64])afVar418);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar758,(undefined1  [64])afVar419);
            auVar721 = vmulps_avx512f(auVar720,auVar758);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar758,(undefined1  [64])afVar420);
            auVar718 = vfmadd213ps_avx512f(auVar721,auVar718,auVar758);
            auVar719 = vpsubd_avx512f(auVar719,auVar730);
            auVar719 = vcvtdq2ps_avx512f(auVar719);
            auVar721 = vaddps_avx512f(auVar719,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar759._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar721._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar759._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar721._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar759._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar721._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar759._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar721._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar759._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar721._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar759._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar721._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar759._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar721._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar759._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar721._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar759._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar721._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar759._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar721._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar759._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar721._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar759._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar721._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar759._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar721._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar759._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar721._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar759._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar721._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar759._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar721._60_4_;
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar759,auVar713);
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar714,auVar720);
            uVar46 = vcmpps_avx512f(auVar717,ZEXT1664(auVar504),2);
            auVar717 = vfmadd231ps_avx512f(auVar718,auVar715,auVar759);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar760._0_4_ = (uint)bVar11 * in_ZMM29._0_4_ | (uint)!bVar11 * auVar717._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar760._4_4_ = (uint)bVar11 * in_ZMM29._4_4_ | (uint)!bVar11 * auVar717._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar760._8_4_ = (uint)bVar11 * in_ZMM29._8_4_ | (uint)!bVar11 * auVar717._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar760._12_4_ = (uint)bVar11 * in_ZMM29._12_4_ | (uint)!bVar11 * auVar717._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar760._16_4_ = (uint)bVar11 * in_ZMM29._16_4_ | (uint)!bVar11 * auVar717._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar760._20_4_ = (uint)bVar11 * in_ZMM29._20_4_ | (uint)!bVar11 * auVar717._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar760._24_4_ = (uint)bVar11 * in_ZMM29._24_4_ | (uint)!bVar11 * auVar717._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar760._28_4_ = (uint)bVar11 * in_ZMM29._28_4_ | (uint)!bVar11 * auVar717._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar760._32_4_ = (uint)bVar11 * in_ZMM29._32_4_ | (uint)!bVar11 * auVar717._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar760._36_4_ = (uint)bVar11 * in_ZMM29._36_4_ | (uint)!bVar11 * auVar717._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar760._40_4_ = (uint)bVar11 * in_ZMM29._40_4_ | (uint)!bVar11 * auVar717._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar760._44_4_ = (uint)bVar11 * in_ZMM29._44_4_ | (uint)!bVar11 * auVar717._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar760._48_4_ = (uint)bVar11 * in_ZMM29._48_4_ | (uint)!bVar11 * auVar717._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar760._52_4_ = (uint)bVar11 * in_ZMM29._52_4_ | (uint)!bVar11 * auVar717._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar760._56_4_ = (uint)bVar11 * in_ZMM29._56_4_ | (uint)!bVar11 * auVar717._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar760._60_4_ = (uint)bVar11 * in_ZMM29._60_4_ | (uint)!bVar11 * auVar717._60_4_;
            auVar717 = vmulps_avx512f(auVar760,*(undefined1 (*) [64])ptr);
            auVar717 = vminps_avx512f(auVar717,(undefined1  [64])afVar405);
            auVar717 = vmaxps_avx512f(auVar717,(undefined1  [64])afVar406);
            auVar718 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar717,in_ZMM3);
            auVar719 = vrndscaleps_avx512f(auVar718,1);
            uVar46 = vcmpps_avx512f(auVar718,auVar719,1);
            auVar718 = vsubps_avx512f(auVar719,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar761._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar719._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar761._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar719._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar761._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar719._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar761._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar719._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar761._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar719._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar761._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar719._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar761._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar719._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar761._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar719._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar761._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar719._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar761._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar719._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar761._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar719._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar761._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar719._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar761._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar719._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar761._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar719._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar761._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar719._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar761._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar719._60_4_;
            auVar717 = vfmadd231ps_avx512f(auVar717,auVar761,auVar716);
            auVar717 = vfmadd231ps_avx512f(auVar717,auVar761,auVar712);
            auVar718 = vfmadd213ps_avx512f(auVar717,(undefined1  [64])afVar408,
                                           (undefined1  [64])afVar409);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar410);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar411);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar412);
            auVar719 = vmulps_avx512f(auVar717,auVar717);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,in_ZMM3);
            auVar717 = vfmadd213ps_avx512f(auVar718,auVar719,auVar717);
            auVar718 = vcvttps2dq_avx512f(auVar761);
            in_ZMM2 = vaddps_avx512f(auVar717,(undefined1  [64])afVar404);
            auVar717 = vpaddd_avx512f(auVar718,auVar730);
            auVar717 = vpslld_avx512f(auVar717,0x17);
            auVar717 = vmulps_avx512f(in_ZMM2,auVar717);
            *(undefined1 (*) [64])outptr = auVar717;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar424 = uVar424 - 1;
            auVar462 = auVar493;
            auVar671 = auVar675;
          } while (uVar424 != 0);
        }
        afVar420 = _ps512_cephes_log_p8;
        afVar419 = _ps512_cephes_log_p7;
        afVar418 = _ps512_cephes_log_p6;
        afVar417 = _ps512_cephes_log_p5;
        afVar416 = _ps512_cephes_log_p4;
        afVar415 = _ps512_cephes_log_p3;
        afVar414 = _ps512_cephes_log_p2;
        afVar413 = _ps512_cephes_log_p1;
        afVar412 = ::_ps512_cephes_exp_p4;
        afVar411 = ::_ps512_cephes_exp_p3;
        afVar410 = ::_ps512_cephes_exp_p2;
        afVar409 = ::_ps512_cephes_exp_p1;
        afVar408 = ::_ps512_cephes_exp_p0;
        afVar407 = ::_ps512_cephes_LOG2EF;
        afVar406 = ::_ps512_exp_lo;
        afVar405 = ::_ps512_exp_hi;
        afVar404 = ::_ps512_1;
        if (iVar421 == 8) {
          uVar424 = 0;
          if (1 < (int)uVar422) {
            auVar671 = ::_ps512_1._0_32_;
            in_ZMM3 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
            auVar730 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
            auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar713 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
            auVar714 = vpxord_avx512f(in_ZMM3,auVar712);
            auVar715 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
            auVar462 = ::_ps512_exp_lo._0_16_;
            auVar716 = vpxord_avx512f(auVar715,auVar712);
            auVar712 = vpxord_avx512f(auVar713,auVar712);
            iVar423 = 1;
            auVar504 = vxorps_avx512vl(auVar504,auVar504);
            in_ZMM29 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
            do {
              auVar672 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar675 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
              auVar717 = vinsertf64x4_avx512f(ZEXT3264(auVar672),auVar675,1);
              auVar718 = vmaxps_avx512f(auVar717,(undefined1  [64])_ps512_min_norm_pos);
              auVar719 = vpsrld_avx512f(auVar718,0x17);
              auVar718 = vpternlogd_avx512f(auVar718,in_ZMM3,(undefined1  [64])_ps512_inv_mant_mask,
                                            0xec);
              uVar46 = vcmpps_avx512f(auVar718,(undefined1  [64])_ps512_cephes_SQRTHF,1);
              auVar720 = vsubps_avx512f(auVar718,(undefined1  [64])afVar404);
              auVar718 = vaddps_avx512f(auVar720,auVar718);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar762._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar720._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar762._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar720._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar762._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar720._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar762._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar720._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar762._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar720._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar762._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar720._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar762._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar720._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              auVar762._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar720._28_4_;
              bVar28 = (byte)(uVar46 >> 8);
              bVar11 = (bool)(bVar28 & 1);
              auVar762._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar720._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              auVar762._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar720._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              auVar762._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar720._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              auVar762._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar720._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              auVar762._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar720._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              auVar762._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar720._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              auVar762._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar720._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              auVar762._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar720._60_4_;
              auVar718 = vfmadd132ps_avx512f(auVar762,(undefined1  [64])afVar413,
                                             (undefined1  [64])_ps512_cephes_log_p0);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar762,(undefined1  [64])afVar414);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar762,(undefined1  [64])afVar415);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar762,(undefined1  [64])afVar416);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar762,(undefined1  [64])afVar417);
              auVar720 = vmulps_avx512f(auVar762,auVar762);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar762,(undefined1  [64])afVar418);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar762,(undefined1  [64])afVar419);
              auVar721 = vmulps_avx512f(auVar720,auVar762);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar762,(undefined1  [64])afVar420);
              auVar718 = vfmadd213ps_avx512f(auVar721,auVar718,auVar762);
              auVar719 = vpsubd_avx512f(auVar719,auVar730);
              auVar719 = vcvtdq2ps_avx512f(auVar719);
              auVar721 = vaddps_avx512f(auVar719,(undefined1  [64])afVar404);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar763._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar721._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar763._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar721._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar763._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar721._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar763._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar721._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar763._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar721._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar763._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar721._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar763._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar721._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              auVar763._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar721._28_4_;
              bVar11 = (bool)(bVar28 & 1);
              auVar763._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar721._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              auVar763._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar721._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              auVar763._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar721._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              auVar763._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar721._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              auVar763._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar721._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              auVar763._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar721._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              auVar763._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar721._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              auVar763._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar721._60_4_;
              auVar718 = vfmadd231ps_avx512f(auVar718,auVar763,auVar713);
              auVar718 = vfmadd231ps_avx512f(auVar718,auVar714,auVar720);
              uVar46 = vcmpps_avx512f(auVar717,ZEXT1664(auVar504),2);
              auVar717 = vfmadd231ps_avx512f(auVar718,auVar715,auVar763);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar764._0_4_ = (uint)bVar11 * in_ZMM29._0_4_ | (uint)!bVar11 * auVar717._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar764._4_4_ = (uint)bVar11 * in_ZMM29._4_4_ | (uint)!bVar11 * auVar717._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar764._8_4_ = (uint)bVar11 * in_ZMM29._8_4_ | (uint)!bVar11 * auVar717._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar764._12_4_ = (uint)bVar11 * in_ZMM29._12_4_ | (uint)!bVar11 * auVar717._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar764._16_4_ = (uint)bVar11 * in_ZMM29._16_4_ | (uint)!bVar11 * auVar717._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar764._20_4_ = (uint)bVar11 * in_ZMM29._20_4_ | (uint)!bVar11 * auVar717._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar764._24_4_ = (uint)bVar11 * in_ZMM29._24_4_ | (uint)!bVar11 * auVar717._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              auVar764._28_4_ = (uint)bVar11 * in_ZMM29._28_4_ | (uint)!bVar11 * auVar717._28_4_;
              bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
              auVar764._32_4_ = (uint)bVar11 * in_ZMM29._32_4_ | (uint)!bVar11 * auVar717._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              auVar764._36_4_ = (uint)bVar11 * in_ZMM29._36_4_ | (uint)!bVar11 * auVar717._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              auVar764._40_4_ = (uint)bVar11 * in_ZMM29._40_4_ | (uint)!bVar11 * auVar717._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              auVar764._44_4_ = (uint)bVar11 * in_ZMM29._44_4_ | (uint)!bVar11 * auVar717._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              auVar764._48_4_ = (uint)bVar11 * in_ZMM29._48_4_ | (uint)!bVar11 * auVar717._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              auVar764._52_4_ = (uint)bVar11 * in_ZMM29._52_4_ | (uint)!bVar11 * auVar717._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              auVar764._56_4_ = (uint)bVar11 * in_ZMM29._56_4_ | (uint)!bVar11 * auVar717._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              auVar764._60_4_ = (uint)bVar11 * in_ZMM29._60_4_ | (uint)!bVar11 * auVar717._60_4_;
              auVar717 = vmulps_avx512f(auVar764,*(undefined1 (*) [64])ptr);
              auVar717 = vminps_avx512f(auVar717,(undefined1  [64])afVar405);
              auVar717 = vmaxps_avx512f(auVar717,(undefined1  [64])afVar406);
              auVar718 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar717,in_ZMM3);
              auVar719 = vrndscaleps_avx512f(auVar718,1);
              uVar46 = vcmpps_avx512f(auVar718,auVar719,1);
              auVar718 = vsubps_avx512f(auVar719,(undefined1  [64])afVar404);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar765._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar719._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar765._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar719._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar765._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar719._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar765._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar719._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar765._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar719._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar765._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar719._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar765._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar719._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              auVar765._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar719._28_4_;
              bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
              auVar765._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar719._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              auVar765._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar719._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              auVar765._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar719._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              auVar765._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar719._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              auVar765._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar719._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              auVar765._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar719._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              auVar765._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar719._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              auVar765._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar719._60_4_;
              auVar717 = vfmadd231ps_avx512f(auVar717,auVar765,auVar716);
              auVar717 = vfmadd231ps_avx512f(auVar717,auVar765,auVar712);
              auVar718 = vfmadd213ps_avx512f(auVar717,(undefined1  [64])afVar408,
                                             (undefined1  [64])afVar409);
              auVar719 = vmulps_avx512f(auVar717,auVar717);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar410);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar411);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar412);
              auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,in_ZMM3);
              auVar717 = vfmadd213ps_avx512f(auVar718,auVar719,auVar717);
              auVar717 = vaddps_avx512f(auVar717,(undefined1  [64])afVar404);
              auVar718 = vcvttps2dq_avx512f(auVar765);
              auVar718 = vpaddd_avx512f(auVar718,auVar730);
              in_ZMM2 = vpslld_avx512f(auVar718,0x17);
              auVar717 = vmulps_avx512f(auVar717,in_ZMM2);
              *(undefined1 (*) [64])outptr = auVar717;
              ptr = (float *)((long)ptr + 0x40);
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar423 = iVar423 + 2;
            } while (iVar423 < (int)uVar422);
            uVar424 = uVar422 & 0x7ffffffe;
          }
          iVar423 = uVar422 - uVar424;
          if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
            auVar1116._8_4_ = 0xffffff82;
            auVar1116._0_8_ = 0xffffff82ffffff82;
            auVar1116._12_4_ = 0xffffff82;
            auVar1116._16_4_ = 0xffffff82;
            auVar1116._20_4_ = 0xffffff82;
            auVar1116._24_4_ = 0xffffff82;
            auVar1116._28_4_ = 0xffffff82;
            in_ZMM3 = ZEXT3264(auVar1116);
            auVar1176._8_4_ = 0x3f3504f3;
            auVar1176._0_8_ = 0x3f3504f33f3504f3;
            auVar1176._12_4_ = 0x3f3504f3;
            auVar1176._16_4_ = 0x3f3504f3;
            auVar1176._20_4_ = 0x3f3504f3;
            auVar1176._24_4_ = 0x3f3504f3;
            auVar1176._28_4_ = 0x3f3504f3;
            auVar1231._8_4_ = 0xbf800000;
            auVar1231._0_8_ = 0xbf800000bf800000;
            auVar1231._12_4_ = 0xbf800000;
            auVar1231._16_4_ = 0xbf800000;
            auVar1231._20_4_ = 0xbf800000;
            auVar1231._24_4_ = 0xbf800000;
            auVar1231._28_4_ = 0xbf800000;
            auVar1293._8_4_ = 0x3f800000;
            auVar1293._0_8_ = 0x3f8000003f800000;
            auVar1293._12_4_ = 0x3f800000;
            auVar1293._16_4_ = 0x3f800000;
            auVar1293._20_4_ = 0x3f800000;
            auVar1293._24_4_ = 0x3f800000;
            auVar1293._28_4_ = 0x3f800000;
            auVar1352._8_4_ = 0x3d9021bb;
            auVar1352._0_8_ = 0x3d9021bb3d9021bb;
            auVar1352._12_4_ = 0x3d9021bb;
            auVar1352._16_4_ = 0x3d9021bb;
            auVar1352._20_4_ = 0x3d9021bb;
            auVar1352._24_4_ = 0x3d9021bb;
            auVar1352._28_4_ = 0x3d9021bb;
            auVar1408._8_4_ = 0xbdebd1b8;
            auVar1408._0_8_ = 0xbdebd1b8bdebd1b8;
            auVar1408._12_4_ = 0xbdebd1b8;
            auVar1408._16_4_ = 0xbdebd1b8;
            auVar1408._20_4_ = 0xbdebd1b8;
            auVar1408._24_4_ = 0xbdebd1b8;
            auVar1408._28_4_ = 0xbdebd1b8;
            auVar1462._8_4_ = 0x3def251a;
            auVar1462._0_8_ = 0x3def251a3def251a;
            auVar1462._12_4_ = 0x3def251a;
            auVar1462._16_4_ = 0x3def251a;
            auVar1462._20_4_ = 0x3def251a;
            auVar1462._24_4_ = 0x3def251a;
            auVar1462._28_4_ = 0x3def251a;
            auVar1516._8_4_ = 0xbdfe5d4f;
            auVar1516._0_8_ = 0xbdfe5d4fbdfe5d4f;
            auVar1516._12_4_ = 0xbdfe5d4f;
            auVar1516._16_4_ = 0xbdfe5d4f;
            auVar1516._20_4_ = 0xbdfe5d4f;
            auVar1516._24_4_ = 0xbdfe5d4f;
            auVar1516._28_4_ = 0xbdfe5d4f;
            auVar1570._8_4_ = 0x3e11e9bf;
            auVar1570._0_8_ = 0x3e11e9bf3e11e9bf;
            auVar1570._12_4_ = 0x3e11e9bf;
            auVar1570._16_4_ = 0x3e11e9bf;
            auVar1570._20_4_ = 0x3e11e9bf;
            auVar1570._24_4_ = 0x3e11e9bf;
            auVar1570._28_4_ = 0x3e11e9bf;
            auVar1624._8_4_ = 0xbe2aae50;
            auVar1624._0_8_ = 0xbe2aae50be2aae50;
            auVar1624._12_4_ = 0xbe2aae50;
            auVar1624._16_4_ = 0xbe2aae50;
            auVar1624._20_4_ = 0xbe2aae50;
            auVar1624._24_4_ = 0xbe2aae50;
            auVar1624._28_4_ = 0xbe2aae50;
            auVar1678._8_4_ = 0x3e4cceac;
            auVar1678._0_8_ = 0x3e4cceac3e4cceac;
            auVar1678._12_4_ = 0x3e4cceac;
            auVar1678._16_4_ = 0x3e4cceac;
            auVar1678._20_4_ = 0x3e4cceac;
            auVar1678._24_4_ = 0x3e4cceac;
            auVar1678._28_4_ = 0x3e4cceac;
            auVar1731._8_4_ = 0xbe7ffffc;
            auVar1731._0_8_ = 0xbe7ffffcbe7ffffc;
            auVar1731._12_4_ = 0xbe7ffffc;
            auVar1731._16_4_ = 0xbe7ffffc;
            auVar1731._20_4_ = 0xbe7ffffc;
            auVar1731._24_4_ = 0xbe7ffffc;
            auVar1731._28_4_ = 0xbe7ffffc;
            auVar1782._8_4_ = 0x3eaaaaaa;
            auVar1782._0_8_ = 0x3eaaaaaa3eaaaaaa;
            auVar1782._12_4_ = 0x3eaaaaaa;
            auVar1782._16_4_ = 0x3eaaaaaa;
            auVar1782._20_4_ = 0x3eaaaaaa;
            auVar1782._24_4_ = 0x3eaaaaaa;
            auVar1782._28_4_ = 0x3eaaaaaa;
            auVar672 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
            auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
            auVar684 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
            auVar462 = vxorps_avx512vl(auVar462,auVar462);
            auVar671 = vpcmpeqd_avx2(auVar671,auVar671);
            auVar676 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
            auVar677 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
            auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
            auVar681 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
            auVar682 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
            auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
            auVar563 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
            auVar564 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
            auVar504 = auVar564._0_16_;
            auVar565 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
            in_ZMM29 = ZEXT3264(auVar565);
            do {
              auVar566 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar224._8_4_ = 0x800000;
              auVar224._0_8_ = 0x80000000800000;
              auVar224._12_4_ = 0x800000;
              auVar224._16_4_ = 0x800000;
              auVar224._20_4_ = 0x800000;
              auVar224._24_4_ = 0x800000;
              auVar224._28_4_ = 0x800000;
              auVar567 = vmaxps_avx512vl(auVar566,auVar224);
              auVar559 = vpsrld_avx512vl(auVar567,0x17);
              auVar966._8_4_ = 0x807fffff;
              auVar966._0_8_ = 0x807fffff807fffff;
              auVar966._12_4_ = 0x807fffff;
              auVar966._16_4_ = 0x807fffff;
              auVar966._20_4_ = 0x807fffff;
              auVar966._24_4_ = 0x807fffff;
              auVar966._28_4_ = 0x807fffff;
              auVar225._8_4_ = 0x3f000000;
              auVar225._0_8_ = 0x3f0000003f000000;
              auVar225._12_4_ = 0x3f000000;
              auVar225._16_4_ = 0x3f000000;
              auVar225._20_4_ = 0x3f000000;
              auVar225._24_4_ = 0x3f000000;
              auVar225._28_4_ = 0x3f000000;
              auVar567 = vpternlogd_avx512vl(auVar567,auVar966,auVar225,0xea);
              uVar46 = vcmpps_avx512vl(auVar567,auVar1176,1);
              auVar560 = vaddps_avx512vl(auVar567,auVar1231);
              auVar567 = vaddps_avx512vl(auVar560,auVar567);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar593._0_4_ = (uint)bVar11 * auVar567._0_4_ | (uint)!bVar11 * auVar560._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar593._4_4_ = (uint)bVar11 * auVar567._4_4_ | (uint)!bVar11 * auVar560._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar593._8_4_ = (uint)bVar11 * auVar567._8_4_ | (uint)!bVar11 * auVar560._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar593._12_4_ = (uint)bVar11 * auVar567._12_4_ | (uint)!bVar11 * auVar560._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar593._16_4_ = (uint)bVar11 * auVar567._16_4_ | (uint)!bVar11 * auVar560._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar593._20_4_ = (uint)bVar11 * auVar567._20_4_ | (uint)!bVar11 * auVar560._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar593._24_4_ = (uint)bVar11 * auVar567._24_4_ | (uint)!bVar11 * auVar560._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar593._28_4_ = (uint)bVar11 * auVar567._28_4_ | (uint)!bVar11 * auVar560._28_4_;
              auVar567 = vfmadd213ps_avx512vl(auVar1352,auVar593,auVar1408);
              auVar567 = vfmadd213ps_avx512vl(auVar567,auVar593,auVar1462);
              auVar567 = vfmadd213ps_avx512vl(auVar567,auVar593,auVar1516);
              uVar426 = vcmpps_avx512vl(auVar566,ZEXT1632(auVar462),2);
              auVar566 = vfmadd213ps_avx512vl(auVar567,auVar593,auVar1570);
              auVar566 = vfmadd213ps_avx512vl(auVar566,auVar593,auVar1624);
              auVar566 = vfmadd213ps_avx512vl(auVar566,auVar593,auVar1678);
              auVar567 = vmulps_avx512vl(auVar593,auVar593);
              auVar566 = vfmadd213ps_avx512vl(auVar566,auVar593,auVar1731);
              auVar566 = vfmadd213ps_avx512vl(auVar566,auVar593,auVar1782);
              auVar560 = vmulps_avx512vl(auVar567,auVar593);
              auVar566 = vmulps_avx512vl(auVar560,auVar566);
              auVar559 = vpaddd_avx512vl(auVar559,auVar1116);
              auVar559 = vcvtdq2ps_avx512vl(auVar559);
              auVar560 = vsubps_avx512vl(auVar559,auVar1293);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar594._0_4_ = (uint)bVar11 * auVar560._0_4_ | (uint)!bVar11 * auVar559._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar594._4_4_ = (uint)bVar11 * auVar560._4_4_ | (uint)!bVar11 * auVar559._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar594._8_4_ = (uint)bVar11 * auVar560._8_4_ | (uint)!bVar11 * auVar559._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar594._12_4_ = (uint)bVar11 * auVar560._12_4_ | (uint)!bVar11 * auVar559._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar594._16_4_ = (uint)bVar11 * auVar560._16_4_ | (uint)!bVar11 * auVar559._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar594._20_4_ = (uint)bVar11 * auVar560._20_4_ | (uint)!bVar11 * auVar559._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar594._24_4_ = (uint)bVar11 * auVar560._24_4_ | (uint)!bVar11 * auVar559._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar594._28_4_ = (uint)bVar11 * auVar560._28_4_ | (uint)!bVar11 * auVar559._28_4_;
              auVar566 = vfmadd231ps_avx512vl(auVar566,auVar594,auVar672);
              auVar566 = vfmsub231ps_avx512vl(auVar566,auVar675,auVar567);
              auVar566 = vsubps_avx(auVar566,auVar593);
              auVar566 = vfmsub231ps_avx512vl(auVar566,auVar684,auVar594);
              bVar11 = (bool)((byte)uVar426 & 1);
              bVar12 = (bool)((byte)(uVar426 >> 1) & 1);
              bVar13 = (bool)((byte)(uVar426 >> 2) & 1);
              bVar14 = (bool)((byte)(uVar426 >> 3) & 1);
              bVar15 = (bool)((byte)(uVar426 >> 4) & 1);
              bVar16 = (bool)((byte)(uVar426 >> 5) & 1);
              bVar17 = (bool)((byte)(uVar426 >> 6) & 1);
              bVar18 = SUB81(uVar426 >> 7,0);
              auVar371._4_4_ =
                   (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar566._4_4_) *
                   *(float *)(*(undefined1 (*) [64])ptr + 4);
              auVar371._0_4_ =
                   (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar566._0_4_) *
                   *(float *)*(undefined1 (*) [64])ptr;
              auVar371._8_4_ =
                   (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar566._8_4_) *
                   *(float *)(*(undefined1 (*) [64])ptr + 8);
              auVar371._12_4_ =
                   (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar566._12_4_) *
                   *(float *)(*(undefined1 (*) [64])ptr + 0xc);
              auVar371._16_4_ =
                   (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar566._16_4_) *
                   *(float *)(*(undefined1 (*) [64])ptr + 0x10);
              auVar371._20_4_ =
                   (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar566._20_4_) *
                   *(float *)(*(undefined1 (*) [64])ptr + 0x14);
              auVar371._24_4_ =
                   (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar566._24_4_) *
                   *(float *)(*(undefined1 (*) [64])ptr + 0x18);
              auVar371._28_4_ = (uint)bVar18 * auVar671._28_4_ | (uint)!bVar18 * auVar566._28_4_;
              auVar566 = vminps_avx512vl(auVar371,auVar676);
              auVar566 = vmaxps_avx512vl(auVar566,auVar677);
              auVar567 = vfmadd231ps_avx512vl(auVar675,auVar566,auVar680);
              auVar559 = vrndscaleps_avx512vl(auVar567,1);
              uVar46 = vcmpps_avx512vl(auVar567,auVar559,1);
              auVar567 = vsubps_avx512vl(auVar559,auVar1293);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar595._0_4_ = (uint)bVar11 * auVar567._0_4_ | (uint)!bVar11 * auVar559._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar595._4_4_ = (uint)bVar11 * auVar567._4_4_ | (uint)!bVar11 * auVar559._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar595._8_4_ = (uint)bVar11 * auVar567._8_4_ | (uint)!bVar11 * auVar559._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar595._12_4_ = (uint)bVar11 * auVar567._12_4_ | (uint)!bVar11 * auVar559._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar595._16_4_ = (uint)bVar11 * auVar567._16_4_ | (uint)!bVar11 * auVar559._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar595._20_4_ = (uint)bVar11 * auVar567._20_4_ | (uint)!bVar11 * auVar559._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar595._24_4_ = (uint)bVar11 * auVar567._24_4_ | (uint)!bVar11 * auVar559._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar595._28_4_ = (uint)bVar11 * auVar567._28_4_ | (uint)!bVar11 * auVar559._28_4_;
              auVar566 = vfmsub231ps_avx512vl(auVar566,auVar595,auVar684);
              auVar566 = vfnmsub231ps_avx512vl(auVar566,auVar595,auVar672);
              auVar567 = vfmadd213ps_avx512vl(auVar681,auVar566,auVar682);
              auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar562);
              auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar563);
              auVar559 = vmulps_avx512vl(auVar566,auVar566);
              auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar564);
              auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar675);
              auVar566 = vfmadd213ps_avx512vl(auVar567,auVar559,auVar566);
              in_ZMM2 = ZEXT3264(auVar566);
              auVar567 = vcvttps2dq_avx512vl(auVar595);
              auVar567 = vpslld_avx2(auVar567,0x17);
              auVar567 = vpaddd_avx512vl(auVar567,auVar565);
              auVar492 = vfmadd213ps_fma(auVar567,auVar566,auVar567);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar492);
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar423 = iVar423 + -1;
            } while (iVar423 != 0);
          }
        }
        afVar420 = _ps512_cephes_log_p8;
        afVar419 = _ps512_cephes_log_p7;
        afVar418 = _ps512_cephes_log_p6;
        afVar417 = _ps512_cephes_log_p5;
        afVar416 = _ps512_cephes_log_p4;
        afVar415 = _ps512_cephes_log_p3;
        afVar414 = _ps512_cephes_log_p2;
        afVar413 = _ps512_cephes_log_p1;
        afVar412 = ::_ps512_cephes_exp_p4;
        afVar411 = ::_ps512_cephes_exp_p3;
        afVar410 = ::_ps512_cephes_exp_p2;
        afVar409 = ::_ps512_cephes_exp_p1;
        afVar408 = ::_ps512_cephes_exp_p0;
        afVar407 = ::_ps512_cephes_LOG2EF;
        afVar406 = ::_ps512_exp_lo;
        afVar405 = ::_ps512_exp_hi;
        afVar404 = ::_ps512_1;
        if (iVar421 != 4) {
          return;
        }
        uVar424 = 0;
        if (3 < (int)uVar422) {
          auVar671 = ::_ps512_1._0_32_;
          in_ZMM3 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar730 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar713 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar714 = vpxord_avx512f(in_ZMM3,auVar712);
          auVar715 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar462 = ::_ps512_exp_lo._0_16_;
          auVar716 = vpxord_avx512f(auVar715,auVar712);
          auVar712 = vpxord_avx512f(auVar713,auVar712);
          iVar421 = 3;
          auVar492 = vxorps_avx512vl(auVar504,auVar504);
          auVar717 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
          do {
            auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
            auVar516 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar672 = vinsertf32x4_avx512vl(ZEXT1632(auVar493),auVar516,1);
            auVar718 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                                CONCAT48(auVar917._0_4_,
                                                                         CONCAT44(auVar917._0_4_,
                                                                                  auVar917._0_4_))),
                                                      CONCAT412(auVar559._0_4_,
                                                                CONCAT48(auVar559._0_4_,
                                                                         CONCAT44(auVar559._0_4_,
                                                                                  auVar559._0_4_))))
                                          ),auVar672,1);
            auVar719 = vmaxps_avx512f(auVar718,(undefined1  [64])_ps512_min_norm_pos);
            auVar720 = vpsrld_avx512f(auVar719,0x17);
            auVar719 = vpternlogd_avx512f(auVar719,in_ZMM3,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar46 = vcmpps_avx512f(auVar719,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar721 = vsubps_avx512f(auVar719,(undefined1  [64])afVar404);
            auVar719 = vaddps_avx512f(auVar721,auVar719);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar766._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar721._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar766._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar721._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar766._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar721._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar766._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar721._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar766._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar721._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar766._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar721._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar766._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar721._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar766._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar721._28_4_;
            bVar28 = (byte)(uVar46 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar766._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar721._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar766._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar721._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar766._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar721._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar766._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar721._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar766._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar721._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar766._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar721._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar766._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar721._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar766._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar721._60_4_;
            auVar719 = vfmadd132ps_avx512f(auVar766,(undefined1  [64])afVar413,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar766,(undefined1  [64])afVar414);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar766,(undefined1  [64])afVar415);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar766,(undefined1  [64])afVar416);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar766,(undefined1  [64])afVar417);
            auVar721 = vmulps_avx512f(auVar766,auVar766);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar766,(undefined1  [64])afVar418);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar766,(undefined1  [64])afVar419);
            auVar722 = vmulps_avx512f(auVar721,auVar766);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar766,(undefined1  [64])afVar420);
            auVar719 = vfmadd213ps_avx512f(auVar722,auVar719,auVar766);
            auVar720 = vpsubd_avx512f(auVar720,auVar730);
            auVar720 = vcvtdq2ps_avx512f(auVar720);
            auVar722 = vaddps_avx512f(auVar720,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar767._0_4_ = (uint)bVar11 * auVar720._0_4_ | (uint)!bVar11 * auVar722._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar767._4_4_ = (uint)bVar11 * auVar720._4_4_ | (uint)!bVar11 * auVar722._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar767._8_4_ = (uint)bVar11 * auVar720._8_4_ | (uint)!bVar11 * auVar722._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar767._12_4_ = (uint)bVar11 * auVar720._12_4_ | (uint)!bVar11 * auVar722._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar767._16_4_ = (uint)bVar11 * auVar720._16_4_ | (uint)!bVar11 * auVar722._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar767._20_4_ = (uint)bVar11 * auVar720._20_4_ | (uint)!bVar11 * auVar722._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar767._24_4_ = (uint)bVar11 * auVar720._24_4_ | (uint)!bVar11 * auVar722._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar767._28_4_ = (uint)bVar11 * auVar720._28_4_ | (uint)!bVar11 * auVar722._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar767._32_4_ = (uint)bVar11 * auVar720._32_4_ | (uint)!bVar11 * auVar722._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar767._36_4_ = (uint)bVar11 * auVar720._36_4_ | (uint)!bVar11 * auVar722._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar767._40_4_ = (uint)bVar11 * auVar720._40_4_ | (uint)!bVar11 * auVar722._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar767._44_4_ = (uint)bVar11 * auVar720._44_4_ | (uint)!bVar11 * auVar722._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar767._48_4_ = (uint)bVar11 * auVar720._48_4_ | (uint)!bVar11 * auVar722._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar767._52_4_ = (uint)bVar11 * auVar720._52_4_ | (uint)!bVar11 * auVar722._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar767._56_4_ = (uint)bVar11 * auVar720._56_4_ | (uint)!bVar11 * auVar722._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar767._60_4_ = (uint)bVar11 * auVar720._60_4_ | (uint)!bVar11 * auVar722._60_4_;
            auVar719 = vfmadd231ps_avx512f(auVar719,auVar767,auVar713);
            auVar719 = vfmadd231ps_avx512f(auVar719,auVar714,auVar721);
            uVar46 = vcmpps_avx512f(auVar718,ZEXT1664(auVar492),2);
            auVar718 = vfmadd231ps_avx512f(auVar719,auVar715,auVar767);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar768._0_4_ = (uint)bVar11 * auVar717._0_4_ | (uint)!bVar11 * auVar718._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar768._4_4_ = (uint)bVar11 * auVar717._4_4_ | (uint)!bVar11 * auVar718._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar768._8_4_ = (uint)bVar11 * auVar717._8_4_ | (uint)!bVar11 * auVar718._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar768._12_4_ = (uint)bVar11 * auVar717._12_4_ | (uint)!bVar11 * auVar718._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar768._16_4_ = (uint)bVar11 * auVar717._16_4_ | (uint)!bVar11 * auVar718._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar768._20_4_ = (uint)bVar11 * auVar717._20_4_ | (uint)!bVar11 * auVar718._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar768._24_4_ = (uint)bVar11 * auVar717._24_4_ | (uint)!bVar11 * auVar718._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar768._28_4_ = (uint)bVar11 * auVar717._28_4_ | (uint)!bVar11 * auVar718._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar768._32_4_ = (uint)bVar11 * auVar717._32_4_ | (uint)!bVar11 * auVar718._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar768._36_4_ = (uint)bVar11 * auVar717._36_4_ | (uint)!bVar11 * auVar718._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar768._40_4_ = (uint)bVar11 * auVar717._40_4_ | (uint)!bVar11 * auVar718._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar768._44_4_ = (uint)bVar11 * auVar717._44_4_ | (uint)!bVar11 * auVar718._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar768._48_4_ = (uint)bVar11 * auVar717._48_4_ | (uint)!bVar11 * auVar718._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar768._52_4_ = (uint)bVar11 * auVar717._52_4_ | (uint)!bVar11 * auVar718._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar768._56_4_ = (uint)bVar11 * auVar717._56_4_ | (uint)!bVar11 * auVar718._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar768._60_4_ = (uint)bVar11 * auVar717._60_4_ | (uint)!bVar11 * auVar718._60_4_;
            auVar718 = vmulps_avx512f(auVar768,*(undefined1 (*) [64])ptr);
            auVar718 = vminps_avx512f(auVar718,(undefined1  [64])afVar405);
            auVar718 = vmaxps_avx512f(auVar718,(undefined1  [64])afVar406);
            auVar719 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar718,in_ZMM3);
            auVar720 = vrndscaleps_avx512f(auVar719,1);
            uVar46 = vcmpps_avx512f(auVar719,auVar720,1);
            auVar719 = vsubps_avx512f(auVar720,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar769._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar720._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar769._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar720._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar769._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar720._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar769._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar720._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar769._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar720._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar769._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar720._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar769._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar720._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar769._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar720._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar769._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar720._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar769._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar720._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar769._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar720._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar769._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar720._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar769._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar720._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar769._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar720._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar769._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar720._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar769._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar720._60_4_;
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar769,auVar716);
            auVar718 = vfmadd231ps_avx512f(auVar718,auVar769,auVar712);
            auVar719 = vfmadd213ps_avx512f(auVar718,(undefined1  [64])afVar408,
                                           (undefined1  [64])afVar409);
            auVar720 = vmulps_avx512f(auVar718,auVar718);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar410);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar411);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar412);
            auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,in_ZMM3);
            auVar718 = vfmadd213ps_avx512f(auVar719,auVar720,auVar718);
            auVar718 = vaddps_avx512f(auVar718,(undefined1  [64])afVar404);
            auVar719 = vcvttps2dq_avx512f(auVar769);
            auVar719 = vpaddd_avx512f(auVar719,auVar730);
            in_ZMM2 = vpslld_avx512f(auVar719,0x17);
            auVar718 = vmulps_avx512f(auVar718,in_ZMM2);
            *(undefined1 (*) [64])outptr = auVar718;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 4;
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 4;
          } while (iVar421 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffc;
        }
        auVar492 = auVar671._0_16_;
        if ((int)(uVar424 | 1) < (int)uVar422) {
          auVar1177._8_4_ = 0x3f3504f3;
          auVar1177._0_8_ = 0x3f3504f33f3504f3;
          auVar1177._12_4_ = 0x3f3504f3;
          auVar1177._16_4_ = 0x3f3504f3;
          auVar1177._20_4_ = 0x3f3504f3;
          auVar1177._24_4_ = 0x3f3504f3;
          auVar1177._28_4_ = 0x3f3504f3;
          auVar1232._8_4_ = 0xbf800000;
          auVar1232._0_8_ = 0xbf800000bf800000;
          auVar1232._12_4_ = 0xbf800000;
          auVar1232._16_4_ = 0xbf800000;
          auVar1232._20_4_ = 0xbf800000;
          auVar1232._24_4_ = 0xbf800000;
          auVar1232._28_4_ = 0xbf800000;
          auVar1294._8_4_ = 0x3f800000;
          auVar1294._0_8_ = 0x3f8000003f800000;
          auVar1294._12_4_ = 0x3f800000;
          auVar1294._16_4_ = 0x3f800000;
          auVar1294._20_4_ = 0x3f800000;
          auVar1294._24_4_ = 0x3f800000;
          auVar1294._28_4_ = 0x3f800000;
          auVar1353._8_4_ = 0x3d9021bb;
          auVar1353._0_8_ = 0x3d9021bb3d9021bb;
          auVar1353._12_4_ = 0x3d9021bb;
          auVar1353._16_4_ = 0x3d9021bb;
          auVar1353._20_4_ = 0x3d9021bb;
          auVar1353._24_4_ = 0x3d9021bb;
          auVar1353._28_4_ = 0x3d9021bb;
          auVar1409._8_4_ = 0xbdebd1b8;
          auVar1409._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1409._12_4_ = 0xbdebd1b8;
          auVar1409._16_4_ = 0xbdebd1b8;
          auVar1409._20_4_ = 0xbdebd1b8;
          auVar1409._24_4_ = 0xbdebd1b8;
          auVar1409._28_4_ = 0xbdebd1b8;
          auVar1463._8_4_ = 0x3def251a;
          auVar1463._0_8_ = 0x3def251a3def251a;
          auVar1463._12_4_ = 0x3def251a;
          auVar1463._16_4_ = 0x3def251a;
          auVar1463._20_4_ = 0x3def251a;
          auVar1463._24_4_ = 0x3def251a;
          auVar1463._28_4_ = 0x3def251a;
          auVar1517._8_4_ = 0xbdfe5d4f;
          auVar1517._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1517._12_4_ = 0xbdfe5d4f;
          auVar1517._16_4_ = 0xbdfe5d4f;
          auVar1517._20_4_ = 0xbdfe5d4f;
          auVar1517._24_4_ = 0xbdfe5d4f;
          auVar1517._28_4_ = 0xbdfe5d4f;
          auVar1571._8_4_ = 0x3e11e9bf;
          auVar1571._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1571._12_4_ = 0x3e11e9bf;
          auVar1571._16_4_ = 0x3e11e9bf;
          auVar1571._20_4_ = 0x3e11e9bf;
          auVar1571._24_4_ = 0x3e11e9bf;
          auVar1571._28_4_ = 0x3e11e9bf;
          auVar1625._8_4_ = 0xbe2aae50;
          auVar1625._0_8_ = 0xbe2aae50be2aae50;
          auVar1625._12_4_ = 0xbe2aae50;
          auVar1625._16_4_ = 0xbe2aae50;
          auVar1625._20_4_ = 0xbe2aae50;
          auVar1625._24_4_ = 0xbe2aae50;
          auVar1625._28_4_ = 0xbe2aae50;
          auVar1679._8_4_ = 0x3e4cceac;
          auVar1679._0_8_ = 0x3e4cceac3e4cceac;
          auVar1679._12_4_ = 0x3e4cceac;
          auVar1679._16_4_ = 0x3e4cceac;
          auVar1679._20_4_ = 0x3e4cceac;
          auVar1679._24_4_ = 0x3e4cceac;
          auVar1679._28_4_ = 0x3e4cceac;
          auVar1732._8_4_ = 0xbe7ffffc;
          auVar1732._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1732._12_4_ = 0xbe7ffffc;
          auVar1732._16_4_ = 0xbe7ffffc;
          auVar1732._20_4_ = 0xbe7ffffc;
          auVar1732._24_4_ = 0xbe7ffffc;
          auVar1732._28_4_ = 0xbe7ffffc;
          auVar1783._8_4_ = 0x3eaaaaaa;
          auVar1783._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar1783._12_4_ = 0x3eaaaaaa;
          auVar1783._16_4_ = 0x3eaaaaaa;
          auVar1783._20_4_ = 0x3eaaaaaa;
          auVar1783._24_4_ = 0x3eaaaaaa;
          auVar1783._28_4_ = 0x3eaaaaaa;
          auVar672 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar684 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar462 = vxorps_avx512vl(auVar462,auVar462);
          auVar671 = vpcmpeqd_avx2(auVar671,auVar671);
          auVar492 = auVar671._0_16_;
          auVar676 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar681 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar682 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar563 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar564 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar565 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          uVar872 = uVar424;
          do {
            auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar516 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar567 = vinsertf32x4_avx512vl(ZEXT1632(auVar493),auVar516,1);
            auVar226._8_4_ = 0x800000;
            auVar226._0_8_ = 0x80000000800000;
            auVar226._12_4_ = 0x800000;
            auVar226._16_4_ = 0x800000;
            auVar226._20_4_ = 0x800000;
            auVar226._24_4_ = 0x800000;
            auVar226._28_4_ = 0x800000;
            auVar566 = vmaxps_avx512vl(auVar567,auVar226);
            auVar559 = vpsrld_avx512vl(auVar566,0x17);
            auVar967._8_4_ = 0x807fffff;
            auVar967._0_8_ = 0x807fffff807fffff;
            auVar967._12_4_ = 0x807fffff;
            auVar967._16_4_ = 0x807fffff;
            auVar967._20_4_ = 0x807fffff;
            auVar967._24_4_ = 0x807fffff;
            auVar967._28_4_ = 0x807fffff;
            auVar227._8_4_ = 0x3f000000;
            auVar227._0_8_ = 0x3f0000003f000000;
            auVar227._12_4_ = 0x3f000000;
            auVar227._16_4_ = 0x3f000000;
            auVar227._20_4_ = 0x3f000000;
            auVar227._24_4_ = 0x3f000000;
            auVar227._28_4_ = 0x3f000000;
            auVar566 = vpternlogd_avx512vl(auVar566,auVar967,auVar227,0xea);
            uVar46 = vcmpps_avx512vl(auVar566,auVar1177,1);
            auVar560 = vaddps_avx512vl(auVar566,auVar1232);
            auVar566 = vaddps_avx512vl(auVar560,auVar566);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar596._0_4_ = (float)((uint)bVar11 * auVar566._0_4_ | (uint)!bVar11 * auVar560._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar596._4_4_ = (float)((uint)bVar11 * auVar566._4_4_ | (uint)!bVar11 * auVar560._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar596._8_4_ = (float)((uint)bVar11 * auVar566._8_4_ | (uint)!bVar11 * auVar560._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar596._12_4_ =
                 (float)((uint)bVar11 * auVar566._12_4_ | (uint)!bVar11 * auVar560._12_4_);
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar596._16_4_ =
                 (float)((uint)bVar11 * auVar566._16_4_ | (uint)!bVar11 * auVar560._16_4_);
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar596._20_4_ =
                 (float)((uint)bVar11 * auVar566._20_4_ | (uint)!bVar11 * auVar560._20_4_);
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar596._24_4_ =
                 (float)((uint)bVar11 * auVar566._24_4_ | (uint)!bVar11 * auVar560._24_4_);
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar596._28_4_ = (uint)bVar11 * auVar566._28_4_ | (uint)!bVar11 * auVar560._28_4_;
            auVar566 = vfmadd213ps_avx512vl(auVar1353,auVar596,auVar1409);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar596,auVar1463);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar596,auVar1517);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar596,auVar1571);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar596,auVar1625);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar596,auVar1679);
            auVar1087._0_4_ = auVar596._0_4_ * auVar596._0_4_;
            auVar1087._4_4_ = auVar596._4_4_ * auVar596._4_4_;
            auVar1087._8_4_ = auVar596._8_4_ * auVar596._8_4_;
            auVar1087._12_4_ = auVar596._12_4_ * auVar596._12_4_;
            auVar1087._16_4_ = auVar596._16_4_ * auVar596._16_4_;
            auVar1087._20_4_ = auVar596._20_4_ * auVar596._20_4_;
            auVar1087._28_36_ = in_ZMM2._28_36_;
            auVar1087._24_4_ = auVar596._24_4_ * auVar596._24_4_;
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar596,auVar1732);
            auVar566 = vfmadd213ps_avx512vl(auVar566,auVar596,auVar1783);
            auVar1140._0_4_ = auVar1087._0_4_ * auVar596._0_4_;
            auVar1140._4_4_ = auVar1087._4_4_ * auVar596._4_4_;
            auVar1140._8_4_ = auVar1087._8_4_ * auVar596._8_4_;
            auVar1140._12_4_ = auVar1087._12_4_ * auVar596._12_4_;
            auVar1140._16_4_ = auVar1087._16_4_ * auVar596._16_4_;
            auVar1140._20_4_ = auVar1087._20_4_ * auVar596._20_4_;
            auVar1140._28_36_ = in_ZMM3._28_36_;
            auVar1140._24_4_ = auVar1087._24_4_ * auVar596._24_4_;
            auVar566 = vmulps_avx512vl(auVar1140._0_32_,auVar566);
            auVar228._8_4_ = 0xffffff82;
            auVar228._0_8_ = 0xffffff82ffffff82;
            auVar228._12_4_ = 0xffffff82;
            auVar228._16_4_ = 0xffffff82;
            auVar228._20_4_ = 0xffffff82;
            auVar228._24_4_ = 0xffffff82;
            auVar228._28_4_ = 0xffffff82;
            auVar559 = vpaddd_avx512vl(auVar559,auVar228);
            auVar559 = vcvtdq2ps_avx512vl(auVar559);
            auVar560 = vsubps_avx512vl(auVar559,auVar1294);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar597._0_4_ = (uint)bVar11 * auVar560._0_4_ | (uint)!bVar11 * auVar559._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar597._4_4_ = (uint)bVar11 * auVar560._4_4_ | (uint)!bVar11 * auVar559._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar597._8_4_ = (uint)bVar11 * auVar560._8_4_ | (uint)!bVar11 * auVar559._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar597._12_4_ = (uint)bVar11 * auVar560._12_4_ | (uint)!bVar11 * auVar559._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar597._16_4_ = (uint)bVar11 * auVar560._16_4_ | (uint)!bVar11 * auVar559._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar597._20_4_ = (uint)bVar11 * auVar560._20_4_ | (uint)!bVar11 * auVar559._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar597._24_4_ = (uint)bVar11 * auVar560._24_4_ | (uint)!bVar11 * auVar559._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar597._28_4_ = (uint)bVar11 * auVar560._28_4_ | (uint)!bVar11 * auVar559._28_4_;
            auVar566 = vfmadd231ps_avx512vl(auVar566,auVar597,auVar672);
            auVar566 = vfmsub231ps_avx512vl(auVar566,auVar675,auVar1087._0_32_);
            auVar566 = vsubps_avx(auVar566,auVar596);
            auVar566 = vfmsub231ps_avx512vl(auVar566,auVar684,auVar597);
            uVar46 = vcmpps_avx512vl(auVar567,ZEXT1632(auVar462),2);
            bVar11 = (bool)((byte)uVar46 & 1);
            bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
            bVar18 = SUB81(uVar46 >> 7,0);
            auVar372._4_4_ =
                 (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar566._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar372._0_4_ =
                 (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar566._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr;
            auVar372._8_4_ =
                 (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar566._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar372._12_4_ =
                 (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar566._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar372._16_4_ =
                 (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar566._16_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            auVar372._20_4_ =
                 (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar566._20_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            auVar372._24_4_ =
                 (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar566._24_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            auVar372._28_4_ = (uint)bVar18 * auVar671._28_4_ | (uint)!bVar18 * auVar566._28_4_;
            auVar566 = vminps_avx512vl(auVar372,auVar676);
            auVar567 = vmaxps_avx512vl(auVar566,auVar677);
            auVar559 = vfmadd231ps_avx512vl(auVar675,auVar567,auVar680);
            auVar566 = vroundps_avx(auVar559,1);
            uVar46 = vcmpps_avx512vl(auVar559,auVar566,1);
            auVar559 = vsubps_avx512vl(auVar566,auVar1294);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar598._0_4_ = (float)((uint)bVar11 * auVar559._0_4_ | (uint)!bVar11 * auVar566._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar598._4_4_ = (float)((uint)bVar11 * auVar559._4_4_ | (uint)!bVar11 * auVar566._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar598._8_4_ = (float)((uint)bVar11 * auVar559._8_4_ | (uint)!bVar11 * auVar566._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar598._12_4_ =
                 (float)((uint)bVar11 * auVar559._12_4_ | (uint)!bVar11 * auVar566._12_4_);
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar598._16_4_ =
                 (float)((uint)bVar11 * auVar559._16_4_ | (uint)!bVar11 * auVar566._16_4_);
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar598._20_4_ =
                 (float)((uint)bVar11 * auVar559._20_4_ | (uint)!bVar11 * auVar566._20_4_);
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar598._24_4_ =
                 (float)((uint)bVar11 * auVar559._24_4_ | (uint)!bVar11 * auVar566._24_4_);
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar598._28_4_ =
                 (float)((uint)bVar11 * auVar559._28_4_ | (uint)!bVar11 * auVar566._28_4_);
            in_ZMM3 = ZEXT3264(auVar598);
            auVar566 = vfmsub231ps_avx512vl(auVar567,auVar598,auVar684);
            auVar566 = vfnmsub231ps_avx512vl(auVar566,auVar598,auVar672);
            auVar567 = vfmadd213ps_avx512vl(auVar681,auVar566,auVar682);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar562);
            auVar559 = vmulps_avx512vl(auVar566,auVar566);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar563);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar564);
            auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar675);
            auVar566 = vfmadd213ps_avx512vl(auVar567,auVar559,auVar566);
            in_ZMM2 = ZEXT3264(auVar566);
            auVar968._0_4_ = (int)auVar598._0_4_;
            auVar968._4_4_ = (int)auVar598._4_4_;
            auVar968._8_4_ = (int)auVar598._8_4_;
            auVar968._12_4_ = (int)auVar598._12_4_;
            auVar968._16_4_ = (int)auVar598._16_4_;
            auVar968._20_4_ = (int)auVar598._20_4_;
            auVar968._24_4_ = (int)auVar598._24_4_;
            auVar968._28_4_ = (int)auVar598._28_4_;
            auVar567 = vpslld_avx2(auVar968,0x17);
            auVar567 = vpaddd_avx512vl(auVar567,auVar565);
            auVar493 = vfmadd213ps_fma(auVar567,auVar566,auVar567);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar493);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar424 = uVar872 + 2;
            iVar421 = uVar872 + 3;
            uVar872 = uVar424;
          } while (iVar421 < (int)uVar422);
        }
        iVar421 = uVar422 - uVar424;
        if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
          return;
        }
        lVar425 = 0;
        auVar1096._8_4_ = 0xffffff82;
        auVar1096._0_8_ = 0xffffff82ffffff82;
        auVar1096._12_4_ = 0xffffff82;
        auVar1150._8_4_ = 0x3f3504f3;
        auVar1150._0_8_ = 0x3f3504f33f3504f3;
        auVar1150._12_4_ = 0x3f3504f3;
        auVar1203._8_4_ = 0xbf800000;
        auVar1203._0_8_ = 0xbf800000bf800000;
        auVar1203._12_4_ = 0xbf800000;
        auVar1267._8_4_ = 0x3f800000;
        auVar1267._0_8_ = 0x3f8000003f800000;
        auVar1267._12_4_ = 0x3f800000;
        auVar934._8_4_ = 0x3d9021bb;
        auVar934._0_8_ = 0x3d9021bb3d9021bb;
        auVar934._12_4_ = 0x3d9021bb;
        auVar1386._8_4_ = 0xbdebd1b8;
        auVar1386._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1386._12_4_ = 0xbdebd1b8;
        auVar1440._8_4_ = 0x3def251a;
        auVar1440._0_8_ = 0x3def251a3def251a;
        auVar1440._12_4_ = 0x3def251a;
        auVar1494._8_4_ = 0xbdfe5d4f;
        auVar1494._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1494._12_4_ = 0xbdfe5d4f;
        auVar1548._8_4_ = 0x3e11e9bf;
        auVar1548._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1548._12_4_ = 0x3e11e9bf;
        auVar1602._8_4_ = 0xbe2aae50;
        auVar1602._0_8_ = 0xbe2aae50be2aae50;
        auVar1602._12_4_ = 0xbe2aae50;
        auVar1656._8_4_ = 0x3e4cceac;
        auVar1656._0_8_ = 0x3e4cceac3e4cceac;
        auVar1656._12_4_ = 0x3e4cceac;
        auVar1710._8_4_ = 0xbe7ffffc;
        auVar1710._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1710._12_4_ = 0xbe7ffffc;
        auVar1763._8_4_ = 0x3eaaaaaa;
        auVar1763._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar1763._12_4_ = 0x3eaaaaaa;
        auVar493 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar516 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar496 = vxorps_avx512vl(auVar462,auVar462);
        auVar462 = vpcmpeqd_avx(auVar492,auVar492);
        auVar492 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar497 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar501 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar502 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar520 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar439 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar440 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar441 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        do {
          auVar442 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + lVar425)));
          uVar46 = vcmpps_avx512vl(auVar442,auVar496,2);
          auVar94._8_4_ = 0x800000;
          auVar94._0_8_ = 0x80000000800000;
          auVar94._12_4_ = 0x800000;
          auVar442 = vmaxps_avx512vl(auVar442,auVar94);
          auVar443 = vpsrld_avx512vl(auVar442,0x17);
          auVar1017._8_4_ = 0x807fffff;
          auVar1017._0_8_ = 0x807fffff807fffff;
          auVar1017._12_4_ = 0x807fffff;
          auVar95._8_4_ = 0x3f000000;
          auVar95._0_8_ = 0x3f0000003f000000;
          auVar95._12_4_ = 0x3f000000;
          auVar442 = vpternlogd_avx512vl(auVar442,auVar1017,auVar95,0xea);
          uVar426 = vcmpps_avx512vl(auVar442,auVar1150,1);
          auVar436 = vaddps_avx512vl(auVar442,auVar1203);
          auVar442 = vaddps_avx512vl(auVar436,auVar442);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar474._0_4_ = (uint)bVar11 * auVar442._0_4_ | (uint)!bVar11 * auVar436._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar474._4_4_ = (uint)bVar11 * auVar442._4_4_ | (uint)!bVar11 * auVar436._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar474._8_4_ = (uint)bVar11 * auVar442._8_4_ | (uint)!bVar11 * auVar436._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar474._12_4_ = (uint)bVar11 * auVar442._12_4_ | (uint)!bVar11 * auVar436._12_4_;
          auVar436 = vmulps_avx512vl(auVar474,auVar474);
          auVar442 = vfmadd213ps_avx512vl(auVar934,auVar474,auVar1386);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar1440);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar1494);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar1548);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar1602);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar1656);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar1710);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar474,auVar1763);
          auVar437 = vmulps_avx512vl(auVar436,auVar474);
          auVar1018._0_4_ = auVar437._0_4_ * auVar442._0_4_;
          auVar1018._4_4_ = auVar437._4_4_ * auVar442._4_4_;
          auVar1018._8_4_ = auVar437._8_4_ * auVar442._8_4_;
          auVar1018._12_4_ = auVar437._12_4_ * auVar442._12_4_;
          auVar442 = vpaddd_avx512vl(auVar443,auVar1096);
          auVar442 = vcvtdq2ps_avx(auVar442);
          auVar443 = vsubps_avx512vl(auVar442,auVar1267);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar475._0_4_ = (uint)bVar11 * auVar443._0_4_ | (uint)!bVar11 * auVar442._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar475._4_4_ = (uint)bVar11 * auVar443._4_4_ | (uint)!bVar11 * auVar442._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar475._8_4_ = (uint)bVar11 * auVar443._8_4_ | (uint)!bVar11 * auVar442._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar475._12_4_ = (uint)bVar11 * auVar443._12_4_ | (uint)!bVar11 * auVar442._12_4_;
          auVar442 = vfmadd231ps_avx512vl(auVar1018,auVar475,auVar493);
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar516,auVar436);
          auVar442 = vsubps_avx512vl(auVar442,auVar474);
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar504,auVar475);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
          pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
          auVar1019._0_4_ =
               (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar442._0_4_) * *pfVar9;
          auVar1019._4_4_ =
               (float)((uint)bVar12 * auVar462._4_4_ | (uint)!bVar12 * auVar442._4_4_) * pfVar9[1];
          auVar1019._8_4_ =
               (float)((uint)bVar13 * auVar462._8_4_ | (uint)!bVar13 * auVar442._8_4_) * pfVar9[2];
          auVar1019._12_4_ =
               (float)((uint)bVar14 * auVar462._12_4_ | (uint)!bVar14 * auVar442._12_4_) * pfVar9[3]
          ;
          auVar442 = vminps_avx512vl(auVar1019,auVar492);
          auVar442 = vmaxps_avx512vl(auVar442,auVar497);
          auVar443 = vfmadd231ps_avx512vl(auVar516,auVar442,auVar498);
          auVar436 = vcvttps2dq_avx512vl(auVar443);
          auVar436 = vcvtdq2ps_avx512vl(auVar436);
          uVar46 = vcmpps_avx512vl(auVar443,auVar436,1);
          auVar443 = vsubps_avx512vl(auVar436,auVar1267);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar476._0_4_ = (uint)bVar11 * auVar443._0_4_ | (uint)!bVar11 * auVar436._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar476._4_4_ = (uint)bVar11 * auVar443._4_4_ | (uint)!bVar11 * auVar436._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar476._8_4_ = (uint)bVar11 * auVar443._8_4_ | (uint)!bVar11 * auVar436._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar476._12_4_ = (uint)bVar11 * auVar443._12_4_ | (uint)!bVar11 * auVar436._12_4_;
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar476,auVar504);
          auVar442 = vfnmsub231ps_avx512vl(auVar442,auVar476,auVar493);
          auVar1330._0_4_ = auVar442._0_4_ * auVar442._0_4_;
          auVar1330._4_4_ = auVar442._4_4_ * auVar442._4_4_;
          auVar1330._8_4_ = auVar442._8_4_ * auVar442._8_4_;
          auVar1330._12_4_ = auVar442._12_4_ * auVar442._12_4_;
          auVar443 = vfmadd213ps_avx512vl(auVar501,auVar442,auVar502);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar520);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar439);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar440);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar516);
          auVar442 = vfmadd213ps_avx512vl(auVar443,auVar1330,auVar442);
          auVar443 = vcvttps2dq_avx512vl(auVar476);
          auVar443 = vpslld_avx(auVar443,0x17);
          auVar443 = vpaddd_avx512vl(auVar443,auVar441);
          auVar442 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar443);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar442;
          lVar425 = lVar425 + 4;
          iVar421 = iVar421 + -1;
        } while (iVar421 != 0);
        return;
      }
      if (bw == 1) {
        uVar422 = 0;
        if (0xf < (int)uVar424) {
          auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          uVar46 = vcmpps_avx512f(auVar730,ZEXT864(0),2);
          auVar730 = vmaxps_avx512f(auVar730,(undefined1  [64])_ps512_min_norm_pos);
          auVar712 = vpsrld_avx512f(auVar730,0x17);
          auVar713 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          auVar730 = vpternlogd_avx512f(auVar730,auVar713,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          auVar714 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar712 = vpsubd_avx512f(auVar712,auVar714);
          auVar712 = vcvtdq2ps_avx512f(auVar712);
          uVar426 = vcmpps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar715 = vsubps_avx512f(auVar730,(undefined1  [64])::_ps512_1);
          auVar716 = vaddps_avx512f(auVar712,(undefined1  [64])::_ps512_1);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar770._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar716._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar770._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar716._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar770._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar716._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar770._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar716._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar770._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar716._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar770._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar716._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar770._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar716._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar770._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar716._28_4_;
          bVar28 = (byte)(uVar426 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar770._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar716._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar770._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar716._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar770._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar716._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar770._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar716._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar770._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar716._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar770._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar716._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar770._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar716._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar770._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar716._60_4_;
          auVar730 = vaddps_avx512f(auVar715,auVar730);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar771._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * auVar715._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar771._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * auVar715._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar771._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * auVar715._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar771._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * auVar715._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar771._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * auVar715._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar771._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * auVar715._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar771._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * auVar715._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar771._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * auVar715._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar771._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * auVar715._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar771._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * auVar715._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar771._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * auVar715._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar771._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * auVar715._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar771._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * auVar715._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar771._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * auVar715._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar771._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * auVar715._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar771._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * auVar715._60_4_;
          auVar730 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar771,
                                         (undefined1  [64])_ps512_cephes_log_p1);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar771,(undefined1  [64])_ps512_cephes_log_p2);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar771,(undefined1  [64])_ps512_cephes_log_p3);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar771,(undefined1  [64])_ps512_cephes_log_p4);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar771,(undefined1  [64])_ps512_cephes_log_p5);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar771,(undefined1  [64])_ps512_cephes_log_p6);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar771,(undefined1  [64])_ps512_cephes_log_p7);
          auVar730 = vfmadd213ps_avx512f(auVar730,auVar771,(undefined1  [64])_ps512_cephes_log_p8);
          auVar712 = vmulps_avx512f(auVar771,auVar771);
          auVar715 = vmulps_avx512f(auVar712,auVar771);
          auVar730 = vmulps_avx512f(auVar715,auVar730);
          auVar730 = vfmadd231ps_avx512f(auVar730,auVar770,(undefined1  [64])_ps512_cephes_log_q1);
          auVar730 = vfmsub231ps_avx512f(auVar730,auVar713,auVar712);
          auVar730 = vsubps_avx512f(auVar730,auVar771);
          auVar730 = vfmsub231ps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_log_q2,auVar770);
          auVar712 = vpternlogd_avx512f(auVar712,auVar712,auVar712,0xff);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar772._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar730._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar772._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar730._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar772._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar730._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar772._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar730._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar772._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar730._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar772._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar730._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar772._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar730._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar772._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar730._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar772._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar730._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar772._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar730._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar772._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar730._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar772._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar730._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar772._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar730._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar772._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar730._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar772._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar730._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar772._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar730._60_4_;
          auVar730 = vbroadcastss_avx512f(ZEXT416(0x80000000));
          auVar712 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar730);
          auVar730 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar730);
          iVar421 = 0xf;
          do {
            auVar715 = vmulps_avx512f(auVar772,*(undefined1 (*) [64])ptr);
            auVar715 = vminps_avx512f(auVar715,(undefined1  [64])afVar405);
            auVar715 = vmaxps_avx512f(auVar715,(undefined1  [64])afVar406);
            auVar716 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar715,auVar713);
            auVar717 = vrndscaleps_avx512f(auVar716,1);
            uVar46 = vcmpps_avx512f(auVar716,auVar717,1);
            auVar716 = vsubps_avx512f(auVar717,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar773._0_4_ = (uint)bVar11 * auVar716._0_4_ | (uint)!bVar11 * auVar717._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar773._4_4_ = (uint)bVar11 * auVar716._4_4_ | (uint)!bVar11 * auVar717._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar773._8_4_ = (uint)bVar11 * auVar716._8_4_ | (uint)!bVar11 * auVar717._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar773._12_4_ = (uint)bVar11 * auVar716._12_4_ | (uint)!bVar11 * auVar717._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar773._16_4_ = (uint)bVar11 * auVar716._16_4_ | (uint)!bVar11 * auVar717._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar773._20_4_ = (uint)bVar11 * auVar716._20_4_ | (uint)!bVar11 * auVar717._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar773._24_4_ = (uint)bVar11 * auVar716._24_4_ | (uint)!bVar11 * auVar717._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar773._28_4_ = (uint)bVar11 * auVar716._28_4_ | (uint)!bVar11 * auVar717._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar773._32_4_ = (uint)bVar11 * auVar716._32_4_ | (uint)!bVar11 * auVar717._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar773._36_4_ = (uint)bVar11 * auVar716._36_4_ | (uint)!bVar11 * auVar717._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar773._40_4_ = (uint)bVar11 * auVar716._40_4_ | (uint)!bVar11 * auVar717._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar773._44_4_ = (uint)bVar11 * auVar716._44_4_ | (uint)!bVar11 * auVar717._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar773._48_4_ = (uint)bVar11 * auVar716._48_4_ | (uint)!bVar11 * auVar717._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar773._52_4_ = (uint)bVar11 * auVar716._52_4_ | (uint)!bVar11 * auVar717._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar773._56_4_ = (uint)bVar11 * auVar716._56_4_ | (uint)!bVar11 * auVar717._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar773._60_4_ = (uint)bVar11 * auVar716._60_4_ | (uint)!bVar11 * auVar717._60_4_;
            auVar715 = vfmadd231ps_avx512f(auVar715,auVar773,auVar712);
            auVar715 = vfmadd231ps_avx512f(auVar715,auVar773,auVar730);
            auVar716 = vfmadd213ps_avx512f(auVar715,(undefined1  [64])afVar408,
                                           (undefined1  [64])afVar409);
            auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar410);
            auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar411);
            auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar412);
            auVar717 = vmulps_avx512f(auVar715,auVar715);
            auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,auVar713);
            auVar715 = vfmadd213ps_avx512f(auVar716,auVar717,auVar715);
            auVar716 = vcvttps2dq_avx512f(auVar773);
            auVar715 = vaddps_avx512f(auVar715,(undefined1  [64])afVar404);
            auVar716 = vpaddd_avx512f(auVar716,auVar714);
            auVar716 = vpslld_avx512f(auVar716,0x17);
            in_ZMM14 = vmulps_avx512f(auVar715,auVar716);
            *(undefined1 (*) [64])outptr = in_ZMM14;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 0x10;
          } while (iVar421 < (int)uVar424);
          uVar422 = uVar424 & 0x7ffffff0;
        }
        if ((int)(uVar422 | 7) < (int)uVar424) {
          auVar559._0_4_ = *ptr1;
          auVar969._4_4_ = auVar559._0_4_;
          auVar969._0_4_ = auVar559._0_4_;
          auVar969._8_4_ = auVar559._0_4_;
          auVar969._12_4_ = auVar559._0_4_;
          auVar969._16_4_ = auVar559._0_4_;
          auVar969._20_4_ = auVar559._0_4_;
          auVar969._24_4_ = auVar559._0_4_;
          auVar969._28_4_ = auVar559._0_4_;
          auVar229._8_4_ = 0x800000;
          auVar229._0_8_ = 0x80000000800000;
          auVar229._12_4_ = 0x800000;
          auVar229._16_4_ = 0x800000;
          auVar229._20_4_ = 0x800000;
          auVar229._24_4_ = 0x800000;
          auVar229._28_4_ = 0x800000;
          auVar671 = vmaxps_avx512vl(auVar969,auVar229);
          auVar675 = vpsrld_avx2(auVar671,0x17);
          auVar1117._8_4_ = 0x3f000000;
          auVar1117._0_8_ = 0x3f0000003f000000;
          auVar1117._12_4_ = 0x3f000000;
          auVar1117._16_4_ = 0x3f000000;
          auVar1117._20_4_ = 0x3f000000;
          auVar1117._24_4_ = 0x3f000000;
          auVar1117._28_4_ = 0x3f000000;
          auVar230._8_4_ = 0x807fffff;
          auVar230._0_8_ = 0x807fffff807fffff;
          auVar230._12_4_ = 0x807fffff;
          auVar230._16_4_ = 0x807fffff;
          auVar230._20_4_ = 0x807fffff;
          auVar230._24_4_ = 0x807fffff;
          auVar230._28_4_ = 0x807fffff;
          auVar672 = vpternlogd_avx512vl(auVar1117,auVar671,auVar230,0xf8);
          auVar231._8_4_ = 0xffffff82;
          auVar231._0_8_ = 0xffffff82ffffff82;
          auVar231._12_4_ = 0xffffff82;
          auVar231._16_4_ = 0xffffff82;
          auVar231._20_4_ = 0xffffff82;
          auVar231._24_4_ = 0xffffff82;
          auVar231._28_4_ = 0xffffff82;
          auVar671 = vpaddd_avx512vl(auVar675,auVar231);
          auVar671 = vcvtdq2ps_avx(auVar671);
          auVar232._8_4_ = 0x3f3504f3;
          auVar232._0_8_ = 0x3f3504f33f3504f3;
          auVar232._12_4_ = 0x3f3504f3;
          auVar232._16_4_ = 0x3f3504f3;
          auVar232._20_4_ = 0x3f3504f3;
          auVar232._24_4_ = 0x3f3504f3;
          auVar232._28_4_ = 0x3f3504f3;
          uVar46 = vcmpps_avx512vl(auVar672,auVar232,1);
          auVar897._8_4_ = 0xbf800000;
          auVar897._0_8_ = 0xbf800000bf800000;
          auVar897._12_4_ = 0xbf800000;
          auVar897._16_4_ = 0xbf800000;
          auVar897._20_4_ = 0xbf800000;
          auVar897._24_4_ = 0xbf800000;
          auVar897._28_4_ = 0xbf800000;
          auVar1233._0_4_ = auVar672._0_4_ + -1.0;
          auVar1233._4_4_ = auVar672._4_4_ + -1.0;
          auVar1233._8_4_ = auVar672._8_4_ + -1.0;
          auVar1233._12_4_ = auVar672._12_4_ + -1.0;
          auVar1233._16_4_ = auVar672._16_4_ + -1.0;
          auVar1233._20_4_ = auVar672._20_4_ + -1.0;
          auVar1233._24_4_ = auVar672._24_4_ + -1.0;
          auVar1233._28_4_ = auVar672._28_4_ + -1.0;
          auVar675 = vaddps_avx512vl(auVar671,auVar897);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar599._0_4_ = (uint)bVar11 * auVar675._0_4_ | (uint)!bVar11 * auVar671._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar599._4_4_ = (uint)bVar11 * auVar675._4_4_ | (uint)!bVar11 * auVar671._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar599._8_4_ = (uint)bVar11 * auVar675._8_4_ | (uint)!bVar11 * auVar671._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar599._12_4_ = (uint)bVar11 * auVar675._12_4_ | (uint)!bVar11 * auVar671._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar599._16_4_ = (uint)bVar11 * auVar675._16_4_ | (uint)!bVar11 * auVar671._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar599._20_4_ = (uint)bVar11 * auVar675._20_4_ | (uint)!bVar11 * auVar671._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar599._24_4_ = (uint)bVar11 * auVar675._24_4_ | (uint)!bVar11 * auVar671._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar599._28_4_ = (uint)bVar11 * auVar675._28_4_ | (uint)!bVar11 * auVar671._28_4_;
          auVar671 = vaddps_avx512vl(auVar1233,auVar672);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar600._0_4_ =
               (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * (int)auVar1233._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar600._4_4_ =
               (float)((uint)bVar11 * auVar671._4_4_ | (uint)!bVar11 * (int)auVar1233._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar600._8_4_ =
               (float)((uint)bVar11 * auVar671._8_4_ | (uint)!bVar11 * (int)auVar1233._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar600._12_4_ =
               (float)((uint)bVar11 * auVar671._12_4_ | (uint)!bVar11 * (int)auVar1233._12_4_);
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar600._16_4_ =
               (float)((uint)bVar11 * auVar671._16_4_ | (uint)!bVar11 * (int)auVar1233._16_4_);
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar600._20_4_ =
               (float)((uint)bVar11 * auVar671._20_4_ | (uint)!bVar11 * (int)auVar1233._20_4_);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar600._24_4_ =
               (float)((uint)bVar11 * auVar671._24_4_ | (uint)!bVar11 * (int)auVar1233._24_4_);
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar600._28_4_ = (uint)bVar11 * auVar671._28_4_ | (uint)!bVar11 * (int)auVar1233._28_4_;
          auVar373._4_4_ = auVar600._4_4_ * auVar600._4_4_;
          auVar373._0_4_ = auVar600._0_4_ * auVar600._0_4_;
          auVar373._8_4_ = auVar600._8_4_ * auVar600._8_4_;
          auVar373._12_4_ = auVar600._12_4_ * auVar600._12_4_;
          auVar373._16_4_ = auVar600._16_4_ * auVar600._16_4_;
          auVar373._20_4_ = auVar600._20_4_ * auVar600._20_4_;
          auVar373._24_4_ = auVar600._24_4_ * auVar600._24_4_;
          auVar373._28_4_ = auVar672._28_4_;
          auVar1295._8_4_ = 0x3d9021bb;
          auVar1295._0_8_ = 0x3d9021bb3d9021bb;
          auVar1295._12_4_ = 0x3d9021bb;
          auVar1295._16_4_ = 0x3d9021bb;
          auVar1295._20_4_ = 0x3d9021bb;
          auVar1295._24_4_ = 0x3d9021bb;
          auVar1295._28_4_ = 0x3d9021bb;
          auVar233._8_4_ = 0xbdebd1b8;
          auVar233._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar233._12_4_ = 0xbdebd1b8;
          auVar233._16_4_ = 0xbdebd1b8;
          auVar233._20_4_ = 0xbdebd1b8;
          auVar233._24_4_ = 0xbdebd1b8;
          auVar233._28_4_ = 0xbdebd1b8;
          auVar671 = vfmadd213ps_avx512vl(auVar1295,auVar600,auVar233);
          auVar234._8_4_ = 0x3def251a;
          auVar234._0_8_ = 0x3def251a3def251a;
          auVar234._12_4_ = 0x3def251a;
          auVar234._16_4_ = 0x3def251a;
          auVar234._20_4_ = 0x3def251a;
          auVar234._24_4_ = 0x3def251a;
          auVar234._28_4_ = 0x3def251a;
          auVar671 = vfmadd213ps_avx512vl(auVar671,auVar600,auVar234);
          auVar235._8_4_ = 0xbdfe5d4f;
          auVar235._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar235._12_4_ = 0xbdfe5d4f;
          auVar235._16_4_ = 0xbdfe5d4f;
          auVar235._20_4_ = 0xbdfe5d4f;
          auVar235._24_4_ = 0xbdfe5d4f;
          auVar235._28_4_ = 0xbdfe5d4f;
          auVar671 = vfmadd213ps_avx512vl(auVar671,auVar600,auVar235);
          auVar236._8_4_ = 0x3e11e9bf;
          auVar236._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar236._12_4_ = 0x3e11e9bf;
          auVar236._16_4_ = 0x3e11e9bf;
          auVar236._20_4_ = 0x3e11e9bf;
          auVar236._24_4_ = 0x3e11e9bf;
          auVar236._28_4_ = 0x3e11e9bf;
          auVar671 = vfmadd213ps_avx512vl(auVar671,auVar600,auVar236);
          auVar237._8_4_ = 0xbe2aae50;
          auVar237._0_8_ = 0xbe2aae50be2aae50;
          auVar237._12_4_ = 0xbe2aae50;
          auVar237._16_4_ = 0xbe2aae50;
          auVar237._20_4_ = 0xbe2aae50;
          auVar237._24_4_ = 0xbe2aae50;
          auVar237._28_4_ = 0xbe2aae50;
          auVar671 = vfmadd213ps_avx512vl(auVar671,auVar600,auVar237);
          auVar238._8_4_ = 0x3e4cceac;
          auVar238._0_8_ = 0x3e4cceac3e4cceac;
          auVar238._12_4_ = 0x3e4cceac;
          auVar238._16_4_ = 0x3e4cceac;
          auVar238._20_4_ = 0x3e4cceac;
          auVar238._24_4_ = 0x3e4cceac;
          auVar238._28_4_ = 0x3e4cceac;
          auVar671 = vfmadd213ps_avx512vl(auVar671,auVar600,auVar238);
          auVar239._8_4_ = 0xbe7ffffc;
          auVar239._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar239._12_4_ = 0xbe7ffffc;
          auVar239._16_4_ = 0xbe7ffffc;
          auVar239._20_4_ = 0xbe7ffffc;
          auVar239._24_4_ = 0xbe7ffffc;
          auVar239._28_4_ = 0xbe7ffffc;
          auVar671 = vfmadd213ps_avx512vl(auVar671,auVar600,auVar239);
          auVar240._8_4_ = 0x3eaaaaaa;
          auVar240._0_8_ = 0x3eaaaaaa3eaaaaaa;
          auVar240._12_4_ = 0x3eaaaaaa;
          auVar240._16_4_ = 0x3eaaaaaa;
          auVar240._20_4_ = 0x3eaaaaaa;
          auVar240._24_4_ = 0x3eaaaaaa;
          auVar240._28_4_ = 0x3eaaaaaa;
          auVar671 = vfmadd213ps_avx512vl(auVar671,auVar600,auVar240);
          auVar374._4_4_ = auVar600._4_4_ * auVar600._4_4_ * auVar600._4_4_ * auVar671._4_4_;
          auVar374._0_4_ = auVar600._0_4_ * auVar600._0_4_ * auVar600._0_4_ * auVar671._0_4_;
          auVar374._8_4_ = auVar600._8_4_ * auVar600._8_4_ * auVar600._8_4_ * auVar671._8_4_;
          auVar374._12_4_ = auVar600._12_4_ * auVar600._12_4_ * auVar600._12_4_ * auVar671._12_4_;
          auVar374._16_4_ = auVar600._16_4_ * auVar600._16_4_ * auVar600._16_4_ * auVar671._16_4_;
          auVar374._20_4_ = auVar600._20_4_ * auVar600._20_4_ * auVar600._20_4_ * auVar671._20_4_;
          auVar374._24_4_ = auVar600._24_4_ * auVar600._24_4_ * auVar600._24_4_ * auVar671._24_4_;
          auVar374._28_4_ = auVar671._28_4_;
          auVar241._8_4_ = 0xb95e8083;
          auVar241._0_8_ = 0xb95e8083b95e8083;
          auVar241._12_4_ = 0xb95e8083;
          auVar241._16_4_ = 0xb95e8083;
          auVar241._20_4_ = 0xb95e8083;
          auVar241._24_4_ = 0xb95e8083;
          auVar241._28_4_ = 0xb95e8083;
          auVar671 = vfmadd231ps_avx512vl(auVar374,auVar599,auVar241);
          auVar675 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          uVar46 = vcmpps_avx512vl(auVar969,auVar675,2);
          auVar242._8_4_ = 0x3f000000;
          auVar242._0_8_ = 0x3f0000003f000000;
          auVar242._12_4_ = 0x3f000000;
          auVar242._16_4_ = 0x3f000000;
          auVar242._20_4_ = 0x3f000000;
          auVar242._24_4_ = 0x3f000000;
          auVar242._28_4_ = 0x3f000000;
          auVar671 = vfmsub231ps_avx512vl(auVar671,auVar373,auVar242);
          auVar671 = vsubps_avx(auVar671,auVar600);
          auVar243._8_4_ = 0x3f318000;
          auVar243._0_8_ = 0x3f3180003f318000;
          auVar243._12_4_ = 0x3f318000;
          auVar243._16_4_ = 0x3f318000;
          auVar243._20_4_ = 0x3f318000;
          auVar243._24_4_ = 0x3f318000;
          auVar243._28_4_ = 0x3f318000;
          auVar672 = vfmsub231ps_avx512vl(auVar671,auVar599,auVar243);
          auVar671 = vpcmpeqd_avx2(auVar675,auVar675);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar1043._8_4_ = 0x42b0c0a5;
          auVar1043._0_8_ = 0x42b0c0a542b0c0a5;
          auVar1043._12_4_ = 0x42b0c0a5;
          auVar1043._16_4_ = 0x42b0c0a5;
          auVar1043._20_4_ = 0x42b0c0a5;
          auVar1043._24_4_ = 0x42b0c0a5;
          auVar1043._28_4_ = 0x42b0c0a5;
          auVar1118._8_4_ = 0xc2b0c0a5;
          auVar1118._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar1118._12_4_ = 0xc2b0c0a5;
          auVar1118._16_4_ = 0xc2b0c0a5;
          auVar1118._20_4_ = 0xc2b0c0a5;
          auVar1118._24_4_ = 0xc2b0c0a5;
          auVar1118._28_4_ = 0xc2b0c0a5;
          auVar1178._8_4_ = 0x3f000000;
          auVar1178._0_8_ = 0x3f0000003f000000;
          auVar1178._12_4_ = 0x3f000000;
          auVar1178._16_4_ = 0x3f000000;
          auVar1178._20_4_ = 0x3f000000;
          auVar1178._24_4_ = 0x3f000000;
          auVar1178._28_4_ = 0x3f000000;
          auVar1234._8_4_ = 0x3fb8aa3b;
          auVar1234._0_8_ = 0x3fb8aa3b3fb8aa3b;
          auVar1234._12_4_ = 0x3fb8aa3b;
          auVar1234._16_4_ = 0x3fb8aa3b;
          auVar1234._20_4_ = 0x3fb8aa3b;
          auVar1234._24_4_ = 0x3fb8aa3b;
          auVar1234._28_4_ = 0x3fb8aa3b;
          auVar1296._8_4_ = 0x3f318000;
          auVar1296._0_8_ = 0x3f3180003f318000;
          auVar1296._12_4_ = 0x3f318000;
          auVar1296._16_4_ = 0x3f318000;
          auVar1296._20_4_ = 0x3f318000;
          auVar1296._24_4_ = 0x3f318000;
          auVar1296._28_4_ = 0x3f318000;
          auVar1354._8_4_ = 0x395e8083;
          auVar1354._0_8_ = 0x395e8083395e8083;
          auVar1354._12_4_ = 0x395e8083;
          auVar1354._16_4_ = 0x395e8083;
          auVar1354._20_4_ = 0x395e8083;
          auVar1354._24_4_ = 0x395e8083;
          auVar1354._28_4_ = 0x395e8083;
          auVar1410._8_4_ = 0x39506967;
          auVar1410._0_8_ = 0x3950696739506967;
          auVar1410._12_4_ = 0x39506967;
          auVar1410._16_4_ = 0x39506967;
          auVar1410._20_4_ = 0x39506967;
          auVar1410._24_4_ = 0x39506967;
          auVar1410._28_4_ = 0x39506967;
          auVar1464._8_4_ = 0x3ab743ce;
          auVar1464._0_8_ = 0x3ab743ce3ab743ce;
          auVar1464._12_4_ = 0x3ab743ce;
          auVar1464._16_4_ = 0x3ab743ce;
          auVar1464._20_4_ = 0x3ab743ce;
          auVar1464._24_4_ = 0x3ab743ce;
          auVar1464._28_4_ = 0x3ab743ce;
          auVar1518._8_4_ = 0x3c088908;
          auVar1518._0_8_ = 0x3c0889083c088908;
          auVar1518._12_4_ = 0x3c088908;
          auVar1518._16_4_ = 0x3c088908;
          auVar1518._20_4_ = 0x3c088908;
          auVar1518._24_4_ = 0x3c088908;
          auVar1518._28_4_ = 0x3c088908;
          auVar1572._8_4_ = 0x3d2aa9c1;
          auVar1572._0_8_ = 0x3d2aa9c13d2aa9c1;
          auVar1572._12_4_ = 0x3d2aa9c1;
          auVar1572._16_4_ = 0x3d2aa9c1;
          auVar1572._20_4_ = 0x3d2aa9c1;
          auVar1572._24_4_ = 0x3d2aa9c1;
          auVar1572._28_4_ = 0x3d2aa9c1;
          auVar1626._8_4_ = 0x3e2aaaaa;
          auVar1626._0_8_ = 0x3e2aaaaa3e2aaaaa;
          auVar1626._12_4_ = 0x3e2aaaaa;
          auVar1626._16_4_ = 0x3e2aaaaa;
          auVar1626._20_4_ = 0x3e2aaaaa;
          auVar1626._24_4_ = 0x3e2aaaaa;
          auVar1626._28_4_ = 0x3e2aaaaa;
          auVar1680._8_4_ = 0x3f800000;
          auVar1680._0_8_ = 0x3f8000003f800000;
          auVar1680._12_4_ = 0x3f800000;
          auVar1680._16_4_ = 0x3f800000;
          auVar1680._20_4_ = 0x3f800000;
          auVar1680._24_4_ = 0x3f800000;
          auVar1680._28_4_ = 0x3f800000;
          uVar872 = uVar422;
          do {
            auVar1756._0_4_ =
                 (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar672._0_4_) *
                 *(float *)*(undefined1 (*) [64])ptr;
            auVar1756._4_4_ =
                 (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar672._4_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar1756._8_4_ =
                 (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar672._8_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar1756._12_4_ =
                 (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar672._12_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar1756._16_4_ =
                 (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar672._16_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            auVar1756._20_4_ =
                 (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar672._20_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            auVar1756._28_36_ = in_ZMM14._28_36_;
            auVar1756._24_4_ =
                 (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar672._24_4_) *
                 *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            auVar675 = vminps_avx(auVar1756._0_32_,auVar1043);
            auVar675 = vmaxps_avx(auVar675,auVar1118);
            auVar462 = vfmadd231ps_fma(auVar1178,auVar675,auVar1234);
            auVar684 = vrndscaleps_avx512vl(ZEXT1632(auVar462),1);
            uVar46 = vcmpps_avx512vl(ZEXT1632(auVar462),auVar684,1);
            auVar676 = vaddps_avx512vl(auVar684,auVar897);
            bVar18 = (bool)((byte)uVar46 & 1);
            auVar601._0_4_ = (uint)bVar18 * auVar676._0_4_ | (uint)!bVar18 * auVar684._0_4_;
            bVar18 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar601._4_4_ = (uint)bVar18 * auVar676._4_4_ | (uint)!bVar18 * auVar684._4_4_;
            bVar18 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar601._8_4_ = (uint)bVar18 * auVar676._8_4_ | (uint)!bVar18 * auVar684._8_4_;
            bVar18 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar601._12_4_ = (uint)bVar18 * auVar676._12_4_ | (uint)!bVar18 * auVar684._12_4_;
            bVar18 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar601._16_4_ = (uint)bVar18 * auVar676._16_4_ | (uint)!bVar18 * auVar684._16_4_;
            bVar18 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar601._20_4_ = (uint)bVar18 * auVar676._20_4_ | (uint)!bVar18 * auVar684._20_4_;
            bVar18 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar601._24_4_ = (uint)bVar18 * auVar676._24_4_ | (uint)!bVar18 * auVar684._24_4_;
            bVar18 = SUB81(uVar46 >> 7,0);
            auVar601._28_4_ = (uint)bVar18 * auVar676._28_4_ | (uint)!bVar18 * auVar684._28_4_;
            auVar675 = vfmsub231ps_avx512vl(auVar675,auVar601,auVar1296);
            auVar675 = vfmsub231ps_avx512vl(auVar675,auVar601,auVar1354);
            auVar462 = vfmadd213ps_fma(auVar1410,auVar675,auVar1464);
            auVar684 = vmulps_avx512vl(auVar675,auVar675);
            auVar462 = vfmadd213ps_fma(ZEXT1632(auVar462),auVar675,auVar1518);
            auVar462 = vfmadd213ps_fma(ZEXT1632(auVar462),auVar675,auVar1572);
            auVar462 = vfmadd213ps_fma(ZEXT1632(auVar462),auVar675,auVar1626);
            auVar462 = vfmadd213ps_fma(ZEXT1632(auVar462),auVar675,auVar1178);
            auVar684 = vfmadd213ps_avx512vl(ZEXT1632(auVar462),auVar684,auVar675);
            auVar675 = vcvttps2dq_avx512vl(auVar601);
            auVar675 = vpslld_avx2(auVar675,0x17);
            auVar675 = vpaddd_avx2(auVar675,auVar1680);
            auVar462 = vfmadd213ps_fma(auVar675,auVar684,auVar675);
            in_ZMM14 = ZEXT1664(auVar462);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar462);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar422 = uVar872 + 8;
            iVar421 = uVar872 + 0xf;
            uVar872 = uVar422;
          } while (iVar421 < (int)uVar424);
        }
        if ((int)uVar424 <= (int)(uVar422 | 3)) {
          return;
        }
        auVar559._0_4_ = *ptr1;
        auVar885._4_4_ = auVar559._0_4_;
        auVar885._0_4_ = auVar559._0_4_;
        auVar885._8_4_ = auVar559._0_4_;
        auVar885._12_4_ = auVar559._0_4_;
        uVar46 = vcmpps_avx512vl(auVar885,ZEXT816(0) << 0x40,2);
        auVar96._8_4_ = 0x800000;
        auVar96._0_8_ = 0x80000000800000;
        auVar96._12_4_ = 0x800000;
        auVar462 = vmaxps_avx512vl(auVar885,auVar96);
        auVar935._8_4_ = 0x3f000000;
        auVar935._0_8_ = 0x3f0000003f000000;
        auVar935._12_4_ = 0x3f000000;
        auVar97._8_4_ = 0x807fffff;
        auVar97._0_8_ = 0x807fffff807fffff;
        auVar97._12_4_ = 0x807fffff;
        auVar492 = vpternlogd_avx512vl(auVar935,auVar462,auVar97,0xf8);
        auVar462 = vpsrld_avx(auVar462,0x17);
        auVar98._8_4_ = 0xffffff82;
        auVar98._0_8_ = 0xffffff82ffffff82;
        auVar98._12_4_ = 0xffffff82;
        auVar462 = vpaddd_avx512vl(auVar462,auVar98);
        auVar462 = vcvtdq2ps_avx(auVar462);
        auVar99._8_4_ = 0x3f3504f3;
        auVar99._0_8_ = 0x3f3504f33f3504f3;
        auVar99._12_4_ = 0x3f3504f3;
        uVar426 = vcmpps_avx512vl(auVar492,auVar99,1);
        auVar886._8_4_ = 0xbf800000;
        auVar886._0_8_ = 0xbf800000bf800000;
        auVar886._12_4_ = 0xbf800000;
        auVar1097._0_4_ = auVar492._0_4_ + -1.0;
        auVar1097._4_4_ = auVar492._4_4_ + -1.0;
        auVar1097._8_4_ = auVar492._8_4_ + -1.0;
        auVar1097._12_4_ = auVar492._12_4_ + -1.0;
        auVar493 = vaddps_avx512vl(auVar462,auVar886);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar477._0_4_ = (uint)bVar11 * auVar493._0_4_ | (uint)!bVar11 * auVar462._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar477._4_4_ = (uint)bVar11 * auVar493._4_4_ | (uint)!bVar11 * auVar462._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar477._8_4_ = (uint)bVar11 * auVar493._8_4_ | (uint)!bVar11 * auVar462._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar477._12_4_ = (uint)bVar11 * auVar493._12_4_ | (uint)!bVar11 * auVar462._12_4_;
        auVar462 = vaddps_avx512vl(auVar1097,auVar492);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar478._0_4_ =
             (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * (int)auVar1097._0_4_);
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar478._4_4_ =
             (float)((uint)bVar11 * auVar462._4_4_ | (uint)!bVar11 * (int)auVar1097._4_4_);
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar478._8_4_ =
             (float)((uint)bVar11 * auVar462._8_4_ | (uint)!bVar11 * (int)auVar1097._8_4_);
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar478._12_4_ =
             (float)((uint)bVar11 * auVar462._12_4_ | (uint)!bVar11 * (int)auVar1097._12_4_);
        auVar936._0_4_ = auVar478._0_4_ * auVar478._0_4_;
        auVar936._4_4_ = auVar478._4_4_ * auVar478._4_4_;
        auVar936._8_4_ = auVar478._8_4_ * auVar478._8_4_;
        auVar936._12_4_ = auVar478._12_4_ * auVar478._12_4_;
        auVar1151._8_4_ = 0x3d9021bb;
        auVar1151._0_8_ = 0x3d9021bb3d9021bb;
        auVar1151._12_4_ = 0x3d9021bb;
        auVar100._8_4_ = 0xbdebd1b8;
        auVar100._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar100._12_4_ = 0xbdebd1b8;
        auVar462 = vfmadd213ps_avx512vl(auVar1151,auVar478,auVar100);
        auVar101._8_4_ = 0x3def251a;
        auVar101._0_8_ = 0x3def251a3def251a;
        auVar101._12_4_ = 0x3def251a;
        auVar462 = vfmadd213ps_avx512vl(auVar462,auVar478,auVar101);
        auVar102._8_4_ = 0xbdfe5d4f;
        auVar102._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar102._12_4_ = 0xbdfe5d4f;
        auVar462 = vfmadd213ps_avx512vl(auVar462,auVar478,auVar102);
        auVar103._8_4_ = 0x3e11e9bf;
        auVar103._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar103._12_4_ = 0x3e11e9bf;
        auVar462 = vfmadd213ps_avx512vl(auVar462,auVar478,auVar103);
        auVar104._8_4_ = 0xbe2aae50;
        auVar104._0_8_ = 0xbe2aae50be2aae50;
        auVar104._12_4_ = 0xbe2aae50;
        auVar462 = vfmadd213ps_avx512vl(auVar462,auVar478,auVar104);
        auVar105._8_4_ = 0x3e4cceac;
        auVar105._0_8_ = 0x3e4cceac3e4cceac;
        auVar105._12_4_ = 0x3e4cceac;
        auVar462 = vfmadd213ps_avx512vl(auVar462,auVar478,auVar105);
        auVar106._8_4_ = 0xbe7ffffc;
        auVar106._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar106._12_4_ = 0xbe7ffffc;
        auVar462 = vfmadd213ps_avx512vl(auVar462,auVar478,auVar106);
        auVar107._8_4_ = 0x3eaaaaaa;
        auVar107._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar107._12_4_ = 0x3eaaaaaa;
        auVar462 = vfmadd213ps_avx512vl(auVar462,auVar478,auVar107);
        auVar1152._0_4_ = auVar936._0_4_ * auVar478._0_4_ * auVar462._0_4_;
        auVar1152._4_4_ = auVar936._4_4_ * auVar478._4_4_ * auVar462._4_4_;
        auVar1152._8_4_ = auVar936._8_4_ * auVar478._8_4_ * auVar462._8_4_;
        auVar1152._12_4_ = auVar936._12_4_ * auVar478._12_4_ * auVar462._12_4_;
        auVar108._8_4_ = 0xb95e8083;
        auVar108._0_8_ = 0xb95e8083b95e8083;
        auVar108._12_4_ = 0xb95e8083;
        auVar462 = vfmadd231ps_avx512vl(auVar1152,auVar477,auVar108);
        auVar109._8_4_ = 0x3f000000;
        auVar109._0_8_ = 0x3f0000003f000000;
        auVar109._12_4_ = 0x3f000000;
        auVar462 = vfmsub231ps_avx512vl(auVar462,auVar936,auVar109);
        auVar462 = vsubps_avx(auVar462,auVar478);
        auVar110._8_4_ = 0x3f318000;
        auVar110._0_8_ = 0x3f3180003f318000;
        auVar110._12_4_ = 0x3f318000;
        auVar492 = vfmsub231ps_avx512vl(auVar462,auVar477,auVar110);
        auVar462 = vpcmpeqd_avx(auVar477,auVar477);
        bVar11 = (bool)((byte)uVar46 & 1);
        bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
        lVar425 = 0;
        auVar1020._8_4_ = 0x42b0c0a5;
        auVar1020._0_8_ = 0x42b0c0a542b0c0a5;
        auVar1020._12_4_ = 0x42b0c0a5;
        auVar1098._8_4_ = 0xc2b0c0a5;
        auVar1098._0_8_ = 0xc2b0c0a5c2b0c0a5;
        auVar1098._12_4_ = 0xc2b0c0a5;
        auVar1153._8_4_ = 0x3f000000;
        auVar1153._0_8_ = 0x3f0000003f000000;
        auVar1153._12_4_ = 0x3f000000;
        auVar1204._8_4_ = 0x3fb8aa3b;
        auVar1204._0_8_ = 0x3fb8aa3b3fb8aa3b;
        auVar1204._12_4_ = 0x3fb8aa3b;
        auVar1268._8_4_ = 0x3f318000;
        auVar1268._0_8_ = 0x3f3180003f318000;
        auVar1268._12_4_ = 0x3f318000;
        auVar1331._8_4_ = 0x395e8083;
        auVar1331._0_8_ = 0x395e8083395e8083;
        auVar1331._12_4_ = 0x395e8083;
        auVar1387._8_4_ = 0x39506967;
        auVar1387._0_8_ = 0x3950696739506967;
        auVar1387._12_4_ = 0x39506967;
        auVar1441._8_4_ = 0x3ab743ce;
        auVar1441._0_8_ = 0x3ab743ce3ab743ce;
        auVar1441._12_4_ = 0x3ab743ce;
        auVar1495._8_4_ = 0x3c088908;
        auVar1495._0_8_ = 0x3c0889083c088908;
        auVar1495._12_4_ = 0x3c088908;
        auVar1549._8_4_ = 0x3d2aa9c1;
        auVar1549._0_8_ = 0x3d2aa9c13d2aa9c1;
        auVar1549._12_4_ = 0x3d2aa9c1;
        auVar1603._8_4_ = 0x3e2aaaaa;
        auVar1603._0_8_ = 0x3e2aaaaa3e2aaaaa;
        auVar1603._12_4_ = 0x3e2aaaaa;
        auVar1657._8_4_ = 0x3f800000;
        auVar1657._0_8_ = 0x3f8000003f800000;
        auVar1657._12_4_ = 0x3f800000;
        do {
          pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
          auVar1711._0_4_ =
               (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar492._0_4_) * *pfVar9;
          auVar1711._4_4_ =
               (float)((uint)bVar12 * auVar462._4_4_ | (uint)!bVar12 * auVar492._4_4_) * pfVar9[1];
          auVar1711._8_4_ =
               (float)((uint)bVar13 * auVar462._8_4_ | (uint)!bVar13 * auVar492._8_4_) * pfVar9[2];
          auVar1711._12_4_ =
               (float)((uint)bVar14 * auVar462._12_4_ | (uint)!bVar14 * auVar492._12_4_) * pfVar9[3]
          ;
          auVar493 = vminps_avx(auVar1711,auVar1020);
          auVar493 = vmaxps_avx(auVar493,auVar1098);
          auVar516 = vfmadd231ps_fma(auVar1153,auVar493,auVar1204);
          auVar504 = vcvttps2dq_avx512vl(auVar516);
          auVar504 = vcvtdq2ps_avx512vl(auVar504);
          uVar46 = vcmpps_avx512vl(auVar516,auVar504,1);
          auVar516 = vaddps_avx512vl(auVar504,auVar886);
          bVar15 = (bool)((byte)uVar46 & 1);
          auVar479._0_4_ = (uint)bVar15 * auVar516._0_4_ | (uint)!bVar15 * auVar504._0_4_;
          bVar15 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar479._4_4_ = (uint)bVar15 * auVar516._4_4_ | (uint)!bVar15 * auVar504._4_4_;
          bVar15 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar479._8_4_ = (uint)bVar15 * auVar516._8_4_ | (uint)!bVar15 * auVar504._8_4_;
          bVar15 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar479._12_4_ = (uint)bVar15 * auVar516._12_4_ | (uint)!bVar15 * auVar504._12_4_;
          auVar493 = vfmsub231ps_avx512vl(auVar493,auVar479,auVar1268);
          auVar493 = vfmsub231ps_avx512vl(auVar493,auVar479,auVar1331);
          auVar1764._0_4_ = auVar493._0_4_ * auVar493._0_4_;
          auVar1764._4_4_ = auVar493._4_4_ * auVar493._4_4_;
          auVar1764._8_4_ = auVar493._8_4_ * auVar493._8_4_;
          auVar1764._12_4_ = auVar493._12_4_ * auVar493._12_4_;
          auVar516 = vfmadd213ps_avx512vl(auVar1387,auVar493,auVar1441);
          auVar516 = vfmadd213ps_avx512vl(auVar516,auVar493,auVar1495);
          auVar516 = vfmadd213ps_avx512vl(auVar516,auVar493,auVar1549);
          auVar516 = vfmadd213ps_avx512vl(auVar516,auVar493,auVar1603);
          auVar516 = vfmadd213ps_avx512vl(auVar516,auVar493,auVar1153);
          auVar516 = vfmadd213ps_avx512vl(auVar516,auVar1764,auVar493);
          auVar493 = vcvttps2dq_avx512vl(auVar479);
          auVar493 = vpslld_avx(auVar493,0x17);
          auVar493 = vpaddd_avx(auVar493,auVar1657);
          auVar493 = vfmadd213ps_avx512vl(auVar493,auVar516,auVar493);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar493;
          lVar425 = lVar425 + 4;
        } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar421 == 0x10) {
        auVar730 = *(undefined1 (*) [64])ptr;
        in_ZMM4 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        in_ZMM5 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar713 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar714 = vpxord_avx512f(in_ZMM4,auVar712);
        auVar715 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar497 = ::_ps512_cephes_LOG2EF._0_16_;
        auVar716 = vpxord_avx512f(auVar715,auVar712);
        auVar712 = vpxord_avx512f(auVar713,auVar712);
        auVar496 = vxorps_avx512vl(auVar496,auVar496);
        in_ZMM30 = vpternlogd_avx512f(in_ZMM30,in_ZMM30,in_ZMM30,0xff);
        uVar424 = uVar422;
        do {
          auVar717 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar718 = vmaxps_avx512f(auVar717,(undefined1  [64])_ps512_min_norm_pos);
          auVar719 = vpsrld_avx512f(auVar718,0x17);
          auVar718 = vpternlogd_avx512f(auVar718,in_ZMM4,(undefined1  [64])_ps512_inv_mant_mask,0xec
                                       );
          uVar46 = vcmpps_avx512f(auVar718,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar720 = vsubps_avx512f(auVar718,(undefined1  [64])afVar404);
          auVar718 = vaddps_avx512f(auVar720,auVar718);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar814._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar720._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar814._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar720._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar814._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar720._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar814._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar720._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar814._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar720._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar814._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar720._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar814._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar720._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar814._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar720._28_4_;
          bVar28 = (byte)(uVar46 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar814._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar720._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar814._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar720._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar814._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar720._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar814._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar720._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar814._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar720._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar814._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar720._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar814._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar720._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar814._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar720._60_4_;
          auVar718 = vfmadd132ps_avx512f(auVar814,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar814,(undefined1  [64])afVar414);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar814,(undefined1  [64])afVar415);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar814,(undefined1  [64])afVar416);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar814,(undefined1  [64])afVar417);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar814,(undefined1  [64])afVar418);
          auVar720 = vmulps_avx512f(auVar814,auVar814);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar814,(undefined1  [64])afVar419);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar814,(undefined1  [64])afVar420);
          auVar721 = vmulps_avx512f(auVar720,auVar814);
          auVar718 = vfmadd213ps_avx512f(auVar721,auVar718,auVar814);
          auVar719 = vpsubd_avx512f(auVar719,in_ZMM5);
          auVar719 = vcvtdq2ps_avx512f(auVar719);
          auVar721 = vaddps_avx512f(auVar719,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar815._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar721._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar815._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar721._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar815._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar721._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar815._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar721._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar815._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar721._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar815._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar721._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar815._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar721._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar815._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar721._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar815._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar721._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar815._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar721._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar815._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar721._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar815._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar721._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar815._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar721._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar815._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar721._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar815._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar721._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar815._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar721._60_4_;
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar815,auVar713);
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar714,auVar720);
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar715,auVar815);
          uVar46 = vcmpps_avx512f(auVar717,ZEXT1664(auVar496),2);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar816._0_4_ = (uint)bVar11 * in_ZMM30._0_4_ | (uint)!bVar11 * auVar718._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar816._4_4_ = (uint)bVar11 * in_ZMM30._4_4_ | (uint)!bVar11 * auVar718._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar816._8_4_ = (uint)bVar11 * in_ZMM30._8_4_ | (uint)!bVar11 * auVar718._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar816._12_4_ = (uint)bVar11 * in_ZMM30._12_4_ | (uint)!bVar11 * auVar718._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar816._16_4_ = (uint)bVar11 * in_ZMM30._16_4_ | (uint)!bVar11 * auVar718._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar816._20_4_ = (uint)bVar11 * in_ZMM30._20_4_ | (uint)!bVar11 * auVar718._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar816._24_4_ = (uint)bVar11 * in_ZMM30._24_4_ | (uint)!bVar11 * auVar718._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar816._28_4_ = (uint)bVar11 * in_ZMM30._28_4_ | (uint)!bVar11 * auVar718._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar816._32_4_ = (uint)bVar11 * in_ZMM30._32_4_ | (uint)!bVar11 * auVar718._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar816._36_4_ = (uint)bVar11 * in_ZMM30._36_4_ | (uint)!bVar11 * auVar718._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar816._40_4_ = (uint)bVar11 * in_ZMM30._40_4_ | (uint)!bVar11 * auVar718._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar816._44_4_ = (uint)bVar11 * in_ZMM30._44_4_ | (uint)!bVar11 * auVar718._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar816._48_4_ = (uint)bVar11 * in_ZMM30._48_4_ | (uint)!bVar11 * auVar718._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar816._52_4_ = (uint)bVar11 * in_ZMM30._52_4_ | (uint)!bVar11 * auVar718._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar816._56_4_ = (uint)bVar11 * in_ZMM30._56_4_ | (uint)!bVar11 * auVar718._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar816._60_4_ = (uint)bVar11 * in_ZMM30._60_4_ | (uint)!bVar11 * auVar718._60_4_;
          auVar717 = vmulps_avx512f(auVar816,auVar730);
          auVar717 = vminps_avx512f(auVar717,(undefined1  [64])afVar405);
          auVar717 = vmaxps_avx512f(auVar717,(undefined1  [64])afVar406);
          auVar718 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar717,in_ZMM4);
          auVar719 = vrndscaleps_avx512f(auVar718,1);
          uVar46 = vcmpps_avx512f(auVar718,auVar719,1);
          auVar718 = vsubps_avx512f(auVar719,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          in_ZMM6._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar719._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          in_ZMM6._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar719._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          in_ZMM6._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar719._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          in_ZMM6._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar719._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          in_ZMM6._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar719._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          in_ZMM6._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar719._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          in_ZMM6._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar719._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          in_ZMM6._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar719._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          in_ZMM6._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar719._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          in_ZMM6._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar719._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          in_ZMM6._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar719._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          in_ZMM6._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar719._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          in_ZMM6._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar719._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          in_ZMM6._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar719._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          in_ZMM6._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar719._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          in_ZMM6._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar719._60_4_;
          auVar717 = vfmadd231ps_avx512f(auVar717,in_ZMM6,auVar716);
          auVar717 = vfmadd231ps_avx512f(auVar717,in_ZMM6,auVar712);
          auVar718 = vfmadd213ps_avx512f(auVar717,(undefined1  [64])afVar408,
                                         (undefined1  [64])afVar409);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar410);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar411);
          in_ZMM7 = vmulps_avx512f(auVar717,auVar717);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar412);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,in_ZMM4);
          auVar717 = vfmadd213ps_avx512f(auVar718,in_ZMM7,auVar717);
          auVar717 = vaddps_avx512f(auVar717,(undefined1  [64])afVar404);
          auVar718 = vcvttps2dq_avx512f(in_ZMM6);
          auVar718 = vpaddd_avx512f(auVar718,in_ZMM5);
          auVar718 = vpslld_avx512f(auVar718,0x17);
          auVar717 = vmulps_avx512f(auVar717,auVar718);
          auVar684 = auVar717._0_32_;
          *(undefined1 (*) [64])outptr = auVar717;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
          auVar492 = auVar493;
          auVar672 = auVar675;
        } while (uVar424 != 0);
      }
      afVar419 = _ps512_cephes_log_p8;
      afVar418 = _ps512_cephes_log_p7;
      afVar417 = _ps512_cephes_log_p6;
      afVar416 = _ps512_cephes_log_p5;
      afVar415 = _ps512_cephes_log_p4;
      afVar414 = _ps512_cephes_log_p3;
      afVar413 = _ps512_cephes_log_p2;
      afVar412 = ::_ps512_cephes_exp_p4;
      afVar411 = ::_ps512_cephes_exp_p3;
      afVar410 = ::_ps512_cephes_exp_p2;
      afVar409 = ::_ps512_cephes_exp_p1;
      afVar408 = ::_ps512_cephes_exp_p0;
      afVar407 = ::_ps512_cephes_LOG2EF;
      afVar406 = ::_ps512_exp_lo;
      afVar405 = ::_ps512_exp_hi;
      afVar404 = ::_ps512_1;
      auVar462 = auVar672._0_16_;
      if (iVar421 == 8) {
        auVar730 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        uVar424 = 0;
        if (1 < (int)uVar422) {
          auVar672 = ::_ps512_1._0_32_;
          in_ZMM4 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
          in_ZMM5 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
          auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar713 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
          auVar714 = vpxord_avx512f(in_ZMM4,auVar712);
          auVar715 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
          auVar492 = ::_ps512_exp_lo._0_16_;
          auVar497 = ::_ps512_cephes_LOG2EF._0_16_;
          auVar716 = vpxord_avx512f(auVar715,auVar712);
          auVar712 = vpxord_avx512f(auVar713,auVar712);
          iVar423 = 1;
          auVar496 = vxorps_avx512vl(auVar496,auVar496);
          in_ZMM30 = vpternlogd_avx512f(in_ZMM30,in_ZMM30,in_ZMM30,0xff);
          do {
            auVar671 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar559._0_4_ = ptr1[1];
            auVar1052._4_4_ = auVar559._0_4_;
            auVar1052._0_4_ = auVar559._0_4_;
            auVar1052._8_4_ = auVar559._0_4_;
            auVar1052._12_4_ = auVar559._0_4_;
            auVar1052._16_4_ = auVar559._0_4_;
            auVar1052._20_4_ = auVar559._0_4_;
            auVar1052._24_4_ = auVar559._0_4_;
            auVar1052._28_4_ = auVar559._0_4_;
            auVar717 = vinsertf64x4_avx512f(ZEXT3264(auVar671),auVar1052,1);
            auVar718 = vmaxps_avx512f(auVar717,(undefined1  [64])_ps512_min_norm_pos);
            auVar719 = vpsrld_avx512f(auVar718,0x17);
            auVar718 = vpternlogd_avx512f(auVar718,in_ZMM4,(undefined1  [64])_ps512_inv_mant_mask,
                                          0xec);
            uVar46 = vcmpps_avx512f(auVar718,(undefined1  [64])_ps512_cephes_SQRTHF,1);
            auVar720 = vsubps_avx512f(auVar718,(undefined1  [64])afVar404);
            auVar718 = vaddps_avx512f(auVar720,auVar718);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar817._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar720._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar817._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar720._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar817._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar720._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar817._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar720._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar817._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar720._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar817._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar720._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar817._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar720._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar817._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar720._28_4_;
            bVar28 = (byte)(uVar46 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar817._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar720._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar817._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar720._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar817._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar720._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar817._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar720._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar817._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar720._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar817._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar720._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar817._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar720._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar817._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar720._60_4_;
            auVar718 = vfmadd132ps_avx512f(auVar817,(undefined1  [64])_ps512_cephes_log_p1,
                                           (undefined1  [64])_ps512_cephes_log_p0);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar817,(undefined1  [64])afVar413);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar817,(undefined1  [64])afVar414);
            auVar720 = vmulps_avx512f(auVar817,auVar817);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar817,(undefined1  [64])afVar415);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar817,(undefined1  [64])afVar416);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar817,(undefined1  [64])afVar417);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar817,(undefined1  [64])afVar418);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar817,(undefined1  [64])afVar419);
            auVar721 = vmulps_avx512f(auVar720,auVar817);
            auVar718 = vfmadd213ps_avx512f(auVar721,auVar718,auVar817);
            auVar719 = vpsubd_avx512f(auVar719,in_ZMM5);
            auVar719 = vcvtdq2ps_avx512f(auVar719);
            auVar721 = vaddps_avx512f(auVar719,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar818._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar721._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar818._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar721._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar818._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar721._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar818._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar721._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar818._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar721._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar818._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar721._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar818._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar721._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar818._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar721._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar818._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar721._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar818._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar721._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar818._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar721._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar818._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar721._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar818._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar721._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar818._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar721._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar818._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar721._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar818._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar721._60_4_;
            uVar46 = vcmpps_avx512f(auVar717,ZEXT1664(auVar496),2);
            auVar717 = vfmadd231ps_avx512f(auVar718,auVar818,auVar713);
            auVar717 = vfmadd231ps_avx512f(auVar717,auVar714,auVar720);
            auVar717 = vfmadd231ps_avx512f(auVar717,auVar715,auVar818);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar819._0_4_ = (uint)bVar11 * in_ZMM30._0_4_ | (uint)!bVar11 * auVar717._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar819._4_4_ = (uint)bVar11 * in_ZMM30._4_4_ | (uint)!bVar11 * auVar717._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar819._8_4_ = (uint)bVar11 * in_ZMM30._8_4_ | (uint)!bVar11 * auVar717._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar819._12_4_ = (uint)bVar11 * in_ZMM30._12_4_ | (uint)!bVar11 * auVar717._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar819._16_4_ = (uint)bVar11 * in_ZMM30._16_4_ | (uint)!bVar11 * auVar717._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar819._20_4_ = (uint)bVar11 * in_ZMM30._20_4_ | (uint)!bVar11 * auVar717._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar819._24_4_ = (uint)bVar11 * in_ZMM30._24_4_ | (uint)!bVar11 * auVar717._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar819._28_4_ = (uint)bVar11 * in_ZMM30._28_4_ | (uint)!bVar11 * auVar717._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar819._32_4_ = (uint)bVar11 * in_ZMM30._32_4_ | (uint)!bVar11 * auVar717._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar819._36_4_ = (uint)bVar11 * in_ZMM30._36_4_ | (uint)!bVar11 * auVar717._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar819._40_4_ = (uint)bVar11 * in_ZMM30._40_4_ | (uint)!bVar11 * auVar717._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar819._44_4_ = (uint)bVar11 * in_ZMM30._44_4_ | (uint)!bVar11 * auVar717._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar819._48_4_ = (uint)bVar11 * in_ZMM30._48_4_ | (uint)!bVar11 * auVar717._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar819._52_4_ = (uint)bVar11 * in_ZMM30._52_4_ | (uint)!bVar11 * auVar717._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar819._56_4_ = (uint)bVar11 * in_ZMM30._56_4_ | (uint)!bVar11 * auVar717._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar819._60_4_ = (uint)bVar11 * in_ZMM30._60_4_ | (uint)!bVar11 * auVar717._60_4_;
            auVar717 = vmulps_avx512f(auVar819,auVar730);
            auVar717 = vminps_avx512f(auVar717,(undefined1  [64])afVar405);
            auVar717 = vmaxps_avx512f(auVar717,(undefined1  [64])afVar406);
            auVar718 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar717,in_ZMM4);
            auVar719 = vrndscaleps_avx512f(auVar718,1);
            uVar46 = vcmpps_avx512f(auVar718,auVar719,1);
            auVar718 = vsubps_avx512f(auVar719,(undefined1  [64])afVar404);
            bVar11 = (bool)((byte)uVar46 & 1);
            in_ZMM6._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar719._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            in_ZMM6._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar719._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            in_ZMM6._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar719._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            in_ZMM6._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar719._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            in_ZMM6._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar719._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            in_ZMM6._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar719._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            in_ZMM6._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar719._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            in_ZMM6._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar719._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            in_ZMM6._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar719._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            in_ZMM6._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar719._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            in_ZMM6._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar719._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            in_ZMM6._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar719._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            in_ZMM6._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar719._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            in_ZMM6._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar719._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            in_ZMM6._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar719._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            in_ZMM6._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar719._60_4_;
            auVar717 = vfmadd231ps_avx512f(auVar717,in_ZMM6,auVar716);
            auVar717 = vfmadd231ps_avx512f(auVar717,in_ZMM6,auVar712);
            auVar718 = vfmadd213ps_avx512f(auVar717,(undefined1  [64])afVar408,
                                           (undefined1  [64])afVar409);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar410);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar411);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,(undefined1  [64])afVar412);
            in_ZMM7 = vmulps_avx512f(auVar717,auVar717);
            auVar718 = vfmadd213ps_avx512f(auVar718,auVar717,in_ZMM4);
            auVar717 = vfmadd213ps_avx512f(auVar718,in_ZMM7,auVar717);
            auVar718 = vcvttps2dq_avx512f(in_ZMM6);
            auVar717 = vaddps_avx512f(auVar717,(undefined1  [64])afVar404);
            auVar718 = vpaddd_avx512f(auVar718,in_ZMM5);
            auVar718 = vpslld_avx512f(auVar718,0x17);
            auVar717 = vmulps_avx512f(auVar717,auVar718);
            auVar684 = auVar717._0_32_;
            *(undefined1 (*) [64])outptr = auVar717;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        auVar462 = auVar672._0_16_;
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          auVar1304._8_4_ = 0xbf800000;
          auVar1304._0_8_ = 0xbf800000bf800000;
          auVar1304._12_4_ = 0xbf800000;
          auVar1304._16_4_ = 0xbf800000;
          auVar1304._20_4_ = 0xbf800000;
          auVar1304._24_4_ = 0xbf800000;
          auVar1304._28_4_ = 0xbf800000;
          in_ZMM6 = ZEXT3264(auVar1304);
          auVar1362._8_4_ = 0x3f800000;
          auVar1362._0_8_ = 0x3f8000003f800000;
          auVar1362._12_4_ = 0x3f800000;
          auVar1362._16_4_ = 0x3f800000;
          auVar1362._20_4_ = 0x3f800000;
          auVar1362._24_4_ = 0x3f800000;
          auVar1362._28_4_ = 0x3f800000;
          in_ZMM7 = ZEXT3264(auVar1362);
          auVar1418._8_4_ = 0x3d9021bb;
          auVar1418._0_8_ = 0x3d9021bb3d9021bb;
          auVar1418._12_4_ = 0x3d9021bb;
          auVar1418._16_4_ = 0x3d9021bb;
          auVar1418._20_4_ = 0x3d9021bb;
          auVar1418._24_4_ = 0x3d9021bb;
          auVar1418._28_4_ = 0x3d9021bb;
          auVar1472._8_4_ = 0xbdebd1b8;
          auVar1472._0_8_ = 0xbdebd1b8bdebd1b8;
          auVar1472._12_4_ = 0xbdebd1b8;
          auVar1472._16_4_ = 0xbdebd1b8;
          auVar1472._20_4_ = 0xbdebd1b8;
          auVar1472._24_4_ = 0xbdebd1b8;
          auVar1472._28_4_ = 0xbdebd1b8;
          auVar1526._8_4_ = 0x3def251a;
          auVar1526._0_8_ = 0x3def251a3def251a;
          auVar1526._12_4_ = 0x3def251a;
          auVar1526._16_4_ = 0x3def251a;
          auVar1526._20_4_ = 0x3def251a;
          auVar1526._24_4_ = 0x3def251a;
          auVar1526._28_4_ = 0x3def251a;
          auVar1580._8_4_ = 0xbdfe5d4f;
          auVar1580._0_8_ = 0xbdfe5d4fbdfe5d4f;
          auVar1580._12_4_ = 0xbdfe5d4f;
          auVar1580._16_4_ = 0xbdfe5d4f;
          auVar1580._20_4_ = 0xbdfe5d4f;
          auVar1580._24_4_ = 0xbdfe5d4f;
          auVar1580._28_4_ = 0xbdfe5d4f;
          auVar1634._8_4_ = 0x3e11e9bf;
          auVar1634._0_8_ = 0x3e11e9bf3e11e9bf;
          auVar1634._12_4_ = 0x3e11e9bf;
          auVar1634._16_4_ = 0x3e11e9bf;
          auVar1634._20_4_ = 0x3e11e9bf;
          auVar1634._24_4_ = 0x3e11e9bf;
          auVar1634._28_4_ = 0x3e11e9bf;
          auVar1688._8_4_ = 0xbe2aae50;
          auVar1688._0_8_ = 0xbe2aae50be2aae50;
          auVar1688._12_4_ = 0xbe2aae50;
          auVar1688._16_4_ = 0xbe2aae50;
          auVar1688._20_4_ = 0xbe2aae50;
          auVar1688._24_4_ = 0xbe2aae50;
          auVar1688._28_4_ = 0xbe2aae50;
          auVar1740._8_4_ = 0x3e4cceac;
          auVar1740._0_8_ = 0x3e4cceac3e4cceac;
          auVar1740._12_4_ = 0x3e4cceac;
          auVar1740._16_4_ = 0x3e4cceac;
          auVar1740._20_4_ = 0x3e4cceac;
          auVar1740._24_4_ = 0x3e4cceac;
          auVar1740._28_4_ = 0x3e4cceac;
          auVar1791._8_4_ = 0xbe7ffffc;
          auVar1791._0_8_ = 0xbe7ffffcbe7ffffc;
          auVar1791._12_4_ = 0xbe7ffffc;
          auVar1791._16_4_ = 0xbe7ffffc;
          auVar1791._20_4_ = 0xbe7ffffc;
          auVar1791._24_4_ = 0xbe7ffffc;
          auVar1791._28_4_ = 0xbe7ffffc;
          auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
          auVar676 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
          auVar677 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
          auVar492 = vxorps_avx512vl(auVar492,auVar492);
          auVar671 = vpcmpeqd_avx2(auVar672,auVar672);
          auVar462 = auVar671._0_16_;
          auVar672 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
          auVar681 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
          auVar682 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
          auVar562 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
          auVar563 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
          auVar564 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
          auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
          auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
          auVar496 = auVar566._0_16_;
          auVar567 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
          in_ZMM30 = ZEXT3264(auVar567);
          do {
            auVar559 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar244._8_4_ = 0x800000;
            auVar244._0_8_ = 0x80000000800000;
            auVar244._12_4_ = 0x800000;
            auVar244._16_4_ = 0x800000;
            auVar244._20_4_ = 0x800000;
            auVar244._24_4_ = 0x800000;
            auVar244._28_4_ = 0x800000;
            auVar684 = vmaxps_avx512vl(auVar559,auVar244);
            auVar560 = vpsrld_avx512vl(auVar684,0x17);
            auVar1122._8_4_ = 0x807fffff;
            auVar1122._0_8_ = 0x807fffff807fffff;
            auVar1122._12_4_ = 0x807fffff;
            auVar1122._16_4_ = 0x807fffff;
            auVar1122._20_4_ = 0x807fffff;
            auVar1122._24_4_ = 0x807fffff;
            auVar1122._28_4_ = 0x807fffff;
            auVar245._8_4_ = 0x3f000000;
            auVar245._0_8_ = 0x3f0000003f000000;
            auVar245._12_4_ = 0x3f000000;
            auVar245._16_4_ = 0x3f000000;
            auVar245._20_4_ = 0x3f000000;
            auVar245._24_4_ = 0x3f000000;
            auVar245._28_4_ = 0x3f000000;
            auVar684 = vpternlogd_avx512vl(auVar684,auVar1122,auVar245,0xea);
            auVar246._8_4_ = 0x3f3504f3;
            auVar246._0_8_ = 0x3f3504f33f3504f3;
            auVar246._12_4_ = 0x3f3504f3;
            auVar246._16_4_ = 0x3f3504f3;
            auVar246._20_4_ = 0x3f3504f3;
            auVar246._24_4_ = 0x3f3504f3;
            auVar246._28_4_ = 0x3f3504f3;
            uVar46 = vcmpps_avx512vl(auVar684,auVar246,1);
            auVar553 = vaddps_avx512vl(auVar684,auVar1304);
            auVar684 = vaddps_avx512vl(auVar553,auVar684);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar639._0_4_ = (float)((uint)bVar11 * auVar684._0_4_ | (uint)!bVar11 * auVar553._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar639._4_4_ = (float)((uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * auVar553._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar639._8_4_ = (float)((uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * auVar553._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar639._12_4_ =
                 (float)((uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * auVar553._12_4_);
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar639._16_4_ =
                 (float)((uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * auVar553._16_4_);
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar639._20_4_ =
                 (float)((uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * auVar553._20_4_);
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar639._24_4_ =
                 (float)((uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * auVar553._24_4_);
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar639._28_4_ = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * auVar553._28_4_;
            auVar684 = vfmadd213ps_avx512vl(auVar1418,auVar639,auVar1472);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar639,auVar1526);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar639,auVar1580);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar639,auVar1634);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar639,auVar1688);
            auVar1193._0_4_ = auVar639._0_4_ * auVar639._0_4_;
            auVar1193._4_4_ = auVar639._4_4_ * auVar639._4_4_;
            auVar1193._8_4_ = auVar639._8_4_ * auVar639._8_4_;
            auVar1193._12_4_ = auVar639._12_4_ * auVar639._12_4_;
            auVar1193._16_4_ = auVar639._16_4_ * auVar639._16_4_;
            auVar1193._20_4_ = auVar639._20_4_ * auVar639._20_4_;
            auVar1193._28_36_ = in_ZMM4._28_36_;
            auVar1193._24_4_ = auVar639._24_4_ * auVar639._24_4_;
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar639,auVar1740);
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar639,auVar1791);
            auVar1257._0_4_ = auVar1193._0_4_ * auVar639._0_4_;
            auVar1257._4_4_ = auVar1193._4_4_ * auVar639._4_4_;
            auVar1257._8_4_ = auVar1193._8_4_ * auVar639._8_4_;
            auVar1257._12_4_ = auVar1193._12_4_ * auVar639._12_4_;
            auVar1257._16_4_ = auVar1193._16_4_ * auVar639._16_4_;
            auVar1257._20_4_ = auVar1193._20_4_ * auVar639._20_4_;
            auVar1257._28_36_ = in_ZMM5._28_36_;
            auVar1257._24_4_ = auVar1193._24_4_ * auVar639._24_4_;
            auVar684 = vfmadd213ps_avx512vl(auVar684,auVar639,auVar675);
            auVar497 = auVar684._0_16_;
            auVar553 = vmulps_avx512vl(auVar1257._0_32_,auVar684);
            auVar247._8_4_ = 0xffffff82;
            auVar247._0_8_ = 0xffffff82ffffff82;
            auVar247._12_4_ = 0xffffff82;
            auVar247._16_4_ = 0xffffff82;
            auVar247._20_4_ = 0xffffff82;
            auVar247._24_4_ = 0xffffff82;
            auVar247._28_4_ = 0xffffff82;
            auVar684 = vpaddd_avx512vl(auVar560,auVar247);
            auVar684 = vcvtdq2ps_avx(auVar684);
            auVar560 = vsubps_avx512vl(auVar684,auVar1362);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar640._0_4_ = (uint)bVar11 * auVar560._0_4_ | (uint)!bVar11 * auVar684._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar640._4_4_ = (uint)bVar11 * auVar560._4_4_ | (uint)!bVar11 * auVar684._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar640._8_4_ = (uint)bVar11 * auVar560._8_4_ | (uint)!bVar11 * auVar684._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar640._12_4_ = (uint)bVar11 * auVar560._12_4_ | (uint)!bVar11 * auVar684._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar640._16_4_ = (uint)bVar11 * auVar560._16_4_ | (uint)!bVar11 * auVar684._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar640._20_4_ = (uint)bVar11 * auVar560._20_4_ | (uint)!bVar11 * auVar684._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar640._24_4_ = (uint)bVar11 * auVar560._24_4_ | (uint)!bVar11 * auVar684._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar640._28_4_ = (uint)bVar11 * auVar560._28_4_ | (uint)!bVar11 * auVar684._28_4_;
            auVar684 = vfmadd231ps_avx512vl(auVar553,auVar640,auVar676);
            auVar560 = vfmsub231ps_avx512vl(auVar684,auVar677,auVar1193._0_32_);
            auVar684 = vsubps_avx(auVar560,auVar639);
            uVar46 = vcmpps_avx512vl(auVar559,ZEXT1632(auVar492),2);
            auVar684 = vfmsub231ps_avx512vl(auVar684,auVar680,auVar640);
            bVar11 = (bool)((byte)uVar46 & 1);
            bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar376._4_4_ =
                 (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar684._4_4_) *
                 auVar730._4_4_;
            auVar376._0_4_ =
                 (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar684._0_4_) *
                 auVar730._0_4_;
            auVar376._8_4_ =
                 (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar684._8_4_) *
                 auVar730._8_4_;
            auVar376._12_4_ =
                 (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar684._12_4_) *
                 auVar730._12_4_;
            auVar376._16_4_ =
                 (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar684._16_4_) *
                 auVar730._16_4_;
            auVar376._20_4_ =
                 (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar684._20_4_) *
                 auVar730._20_4_;
            auVar376._24_4_ =
                 (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar684._24_4_) *
                 auVar730._24_4_;
            auVar376._28_4_ = auVar640._28_4_;
            auVar684 = vminps_avx512vl(auVar376,auVar672);
            auVar559 = vmaxps_avx512vl(auVar684,auVar681);
            auVar553 = vfmadd231ps_avx512vl(auVar677,auVar559,auVar682);
            auVar684 = vroundps_avx(auVar553,1);
            uVar46 = vcmpps_avx512vl(auVar553,auVar684,1);
            auVar553 = vsubps_avx512vl(auVar684,auVar1362);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar641._0_4_ = (float)((uint)bVar11 * auVar553._0_4_ | (uint)!bVar11 * auVar684._0_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar641._4_4_ = (float)((uint)bVar11 * auVar553._4_4_ | (uint)!bVar11 * auVar684._4_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar641._8_4_ = (float)((uint)bVar11 * auVar553._8_4_ | (uint)!bVar11 * auVar684._8_4_)
            ;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar641._12_4_ =
                 (float)((uint)bVar11 * auVar553._12_4_ | (uint)!bVar11 * auVar684._12_4_);
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar641._16_4_ =
                 (float)((uint)bVar11 * auVar553._16_4_ | (uint)!bVar11 * auVar684._16_4_);
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar641._20_4_ =
                 (float)((uint)bVar11 * auVar553._20_4_ | (uint)!bVar11 * auVar684._20_4_);
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar641._24_4_ =
                 (float)((uint)bVar11 * auVar553._24_4_ | (uint)!bVar11 * auVar684._24_4_);
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar641._28_4_ =
                 (float)((uint)bVar11 * auVar553._28_4_ | (uint)!bVar11 * auVar684._28_4_);
            in_ZMM4 = ZEXT3264(auVar641);
            auVar684 = vfmsub231ps_avx512vl(auVar559,auVar641,auVar680);
            auVar684 = vfnmsub231ps_avx512vl(auVar684,auVar641,auVar676);
            auVar559 = vfmadd213ps_avx512vl(auVar562,auVar684,auVar563);
            auVar559 = vfmadd213ps_avx512vl(auVar559,auVar684,auVar564);
            auVar377._4_4_ = auVar684._4_4_ * auVar684._4_4_;
            auVar377._0_4_ = auVar684._0_4_ * auVar684._0_4_;
            auVar377._8_4_ = auVar684._8_4_ * auVar684._8_4_;
            auVar377._12_4_ = auVar684._12_4_ * auVar684._12_4_;
            auVar377._16_4_ = auVar684._16_4_ * auVar684._16_4_;
            auVar377._20_4_ = auVar684._20_4_ * auVar684._20_4_;
            auVar377._24_4_ = auVar684._24_4_ * auVar684._24_4_;
            auVar377._28_4_ = auVar560._28_4_;
            in_ZMM5 = ZEXT3264(auVar377);
            auVar559 = vfmadd213ps_avx512vl(auVar559,auVar684,auVar565);
            auVar559 = vfmadd213ps_avx512vl(auVar559,auVar684,auVar566);
            auVar559 = vfmadd213ps_avx512vl(auVar559,auVar684,auVar677);
            auVar493 = vfmadd213ps_fma(auVar559,auVar377,auVar684);
            auVar1053._0_4_ = (int)auVar641._0_4_;
            auVar1053._4_4_ = (int)auVar641._4_4_;
            auVar1053._8_4_ = (int)auVar641._8_4_;
            auVar1053._12_4_ = (int)auVar641._12_4_;
            auVar1053._16_4_ = (int)auVar641._16_4_;
            auVar1053._20_4_ = (int)auVar641._20_4_;
            auVar1053._24_4_ = (int)auVar641._24_4_;
            auVar1053._28_4_ = (int)auVar641._28_4_;
            auVar684 = vpslld_avx2(auVar1053,0x17);
            auVar684 = vpaddd_avx512vl(auVar684,auVar567);
            auVar493 = vfmadd213ps_fma(auVar684,ZEXT1632(auVar493),auVar684);
            auVar684 = ZEXT1632(auVar493);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar493);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      afVar419 = _ps512_cephes_log_p8;
      afVar418 = _ps512_cephes_log_p7;
      afVar417 = _ps512_cephes_log_p6;
      afVar416 = _ps512_cephes_log_p5;
      afVar415 = _ps512_cephes_log_p4;
      afVar414 = _ps512_cephes_log_p3;
      afVar413 = _ps512_cephes_log_p2;
      afVar412 = ::_ps512_cephes_exp_p4;
      afVar411 = ::_ps512_cephes_exp_p3;
      afVar410 = ::_ps512_cephes_exp_p2;
      afVar409 = ::_ps512_cephes_exp_p1;
      afVar408 = ::_ps512_cephes_exp_p0;
      afVar407 = ::_ps512_cephes_LOG2EF;
      afVar406 = ::_ps512_exp_lo;
      afVar405 = ::_ps512_exp_hi;
      afVar404 = ::_ps512_1;
      if (iVar421 != 4) {
        return;
      }
      auVar730 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      uVar424 = 0;
      if (3 < (int)uVar422) {
        auVar462 = ::_ps512_1._0_16_;
        auVar712 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar713 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar714 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar715 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar716 = vpxord_avx512f(auVar712,auVar714);
        auVar717 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar492 = ::_ps512_exp_lo._0_16_;
        auVar497 = ::_ps512_cephes_LOG2EF._0_16_;
        auVar718 = vpxord_avx512f(auVar717,auVar714);
        auVar714 = vpxord_avx512f(auVar715,auVar714);
        iVar421 = 3;
        auVar493 = vxorps_avx512vl(auVar496,auVar496);
        auVar719 = vpternlogd_avx512f(in_ZMM30,in_ZMM30,in_ZMM30,0xff);
        do {
          auVar516 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
          auVar559._0_4_ = ptr1[3];
          auVar1015._4_4_ = auVar559._0_4_;
          auVar1015._0_4_ = auVar559._0_4_;
          auVar1015._8_4_ = auVar559._0_4_;
          auVar1015._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = *ptr1;
          auVar671 = vinsertf32x4_avx512vl(ZEXT1632(auVar516),auVar1015,1);
          auVar516 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar672 = vinsertf32x4_avx512vl
                               (ZEXT1632(CONCAT412(auVar559._0_4_,
                                                   CONCAT48(auVar559._0_4_,
                                                            CONCAT44(auVar559._0_4_,auVar559._0_4_))
                                                  )),auVar516,1);
          auVar720 = vinsertf64x4_avx512f(ZEXT3264(auVar672),auVar671,1);
          auVar721 = vmaxps_avx512f(auVar720,(undefined1  [64])_ps512_min_norm_pos);
          auVar722 = vpsrld_avx512f(auVar721,0x17);
          auVar721 = vpternlogd_avx512f(auVar721,auVar712,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          uVar46 = vcmpps_avx512f(auVar721,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar723 = vsubps_avx512f(auVar721,(undefined1  [64])afVar404);
          auVar721 = vaddps_avx512f(auVar723,auVar721);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar820._0_4_ = (uint)bVar11 * auVar721._0_4_ | (uint)!bVar11 * auVar723._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar820._4_4_ = (uint)bVar11 * auVar721._4_4_ | (uint)!bVar11 * auVar723._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar820._8_4_ = (uint)bVar11 * auVar721._8_4_ | (uint)!bVar11 * auVar723._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar820._12_4_ = (uint)bVar11 * auVar721._12_4_ | (uint)!bVar11 * auVar723._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar820._16_4_ = (uint)bVar11 * auVar721._16_4_ | (uint)!bVar11 * auVar723._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar820._20_4_ = (uint)bVar11 * auVar721._20_4_ | (uint)!bVar11 * auVar723._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar820._24_4_ = (uint)bVar11 * auVar721._24_4_ | (uint)!bVar11 * auVar723._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar820._28_4_ = (uint)bVar11 * auVar721._28_4_ | (uint)!bVar11 * auVar723._28_4_;
          bVar28 = (byte)(uVar46 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar820._32_4_ = (uint)bVar11 * auVar721._32_4_ | (uint)!bVar11 * auVar723._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar820._36_4_ = (uint)bVar11 * auVar721._36_4_ | (uint)!bVar11 * auVar723._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar820._40_4_ = (uint)bVar11 * auVar721._40_4_ | (uint)!bVar11 * auVar723._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar820._44_4_ = (uint)bVar11 * auVar721._44_4_ | (uint)!bVar11 * auVar723._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar820._48_4_ = (uint)bVar11 * auVar721._48_4_ | (uint)!bVar11 * auVar723._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar820._52_4_ = (uint)bVar11 * auVar721._52_4_ | (uint)!bVar11 * auVar723._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar820._56_4_ = (uint)bVar11 * auVar721._56_4_ | (uint)!bVar11 * auVar723._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar820._60_4_ = (uint)bVar11 * auVar721._60_4_ | (uint)!bVar11 * auVar723._60_4_;
          auVar721 = vfmadd132ps_avx512f(auVar820,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar820,(undefined1  [64])afVar413);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar820,(undefined1  [64])afVar414);
          auVar723 = vmulps_avx512f(auVar820,auVar820);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar820,(undefined1  [64])afVar415);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar820,(undefined1  [64])afVar416);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar820,(undefined1  [64])afVar417);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar820,(undefined1  [64])afVar418);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar820,(undefined1  [64])afVar419);
          auVar724 = vmulps_avx512f(auVar723,auVar820);
          auVar721 = vfmadd213ps_avx512f(auVar724,auVar721,auVar820);
          auVar722 = vpsubd_avx512f(auVar722,auVar713);
          auVar722 = vcvtdq2ps_avx512f(auVar722);
          auVar724 = vaddps_avx512f(auVar722,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar821._0_4_ = (uint)bVar11 * auVar722._0_4_ | (uint)!bVar11 * auVar724._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar821._4_4_ = (uint)bVar11 * auVar722._4_4_ | (uint)!bVar11 * auVar724._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar821._8_4_ = (uint)bVar11 * auVar722._8_4_ | (uint)!bVar11 * auVar724._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar821._12_4_ = (uint)bVar11 * auVar722._12_4_ | (uint)!bVar11 * auVar724._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar821._16_4_ = (uint)bVar11 * auVar722._16_4_ | (uint)!bVar11 * auVar724._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar821._20_4_ = (uint)bVar11 * auVar722._20_4_ | (uint)!bVar11 * auVar724._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar821._24_4_ = (uint)bVar11 * auVar722._24_4_ | (uint)!bVar11 * auVar724._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar821._28_4_ = (uint)bVar11 * auVar722._28_4_ | (uint)!bVar11 * auVar724._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar821._32_4_ = (uint)bVar11 * auVar722._32_4_ | (uint)!bVar11 * auVar724._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar821._36_4_ = (uint)bVar11 * auVar722._36_4_ | (uint)!bVar11 * auVar724._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar821._40_4_ = (uint)bVar11 * auVar722._40_4_ | (uint)!bVar11 * auVar724._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar821._44_4_ = (uint)bVar11 * auVar722._44_4_ | (uint)!bVar11 * auVar724._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar821._48_4_ = (uint)bVar11 * auVar722._48_4_ | (uint)!bVar11 * auVar724._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar821._52_4_ = (uint)bVar11 * auVar722._52_4_ | (uint)!bVar11 * auVar724._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar821._56_4_ = (uint)bVar11 * auVar722._56_4_ | (uint)!bVar11 * auVar724._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar821._60_4_ = (uint)bVar11 * auVar722._60_4_ | (uint)!bVar11 * auVar724._60_4_;
          uVar46 = vcmpps_avx512f(auVar720,ZEXT1664(auVar493),2);
          auVar720 = vfmadd231ps_avx512f(auVar721,auVar821,auVar715);
          auVar720 = vfmadd231ps_avx512f(auVar720,auVar716,auVar723);
          auVar720 = vfmadd231ps_avx512f(auVar720,auVar717,auVar821);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar822._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar720._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar822._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar720._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar822._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar720._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar822._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar720._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar822._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar720._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar822._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar720._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar822._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar720._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar822._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar720._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar822._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar720._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar822._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar720._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar822._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar720._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar822._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar720._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar822._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar720._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar822._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar720._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar822._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar720._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar822._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar720._60_4_;
          auVar720 = vmulps_avx512f(auVar822,auVar730);
          auVar720 = vminps_avx512f(auVar720,(undefined1  [64])afVar405);
          auVar720 = vmaxps_avx512f(auVar720,(undefined1  [64])afVar406);
          auVar721 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar720,auVar712);
          auVar722 = vrndscaleps_avx512f(auVar721,1);
          uVar46 = vcmpps_avx512f(auVar721,auVar722,1);
          auVar721 = vsubps_avx512f(auVar722,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          in_ZMM6._0_4_ = (uint)bVar11 * auVar721._0_4_ | (uint)!bVar11 * auVar722._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          in_ZMM6._4_4_ = (uint)bVar11 * auVar721._4_4_ | (uint)!bVar11 * auVar722._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          in_ZMM6._8_4_ = (uint)bVar11 * auVar721._8_4_ | (uint)!bVar11 * auVar722._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          in_ZMM6._12_4_ = (uint)bVar11 * auVar721._12_4_ | (uint)!bVar11 * auVar722._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          in_ZMM6._16_4_ = (uint)bVar11 * auVar721._16_4_ | (uint)!bVar11 * auVar722._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          in_ZMM6._20_4_ = (uint)bVar11 * auVar721._20_4_ | (uint)!bVar11 * auVar722._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          in_ZMM6._24_4_ = (uint)bVar11 * auVar721._24_4_ | (uint)!bVar11 * auVar722._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          in_ZMM6._28_4_ = (uint)bVar11 * auVar721._28_4_ | (uint)!bVar11 * auVar722._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          in_ZMM6._32_4_ = (uint)bVar11 * auVar721._32_4_ | (uint)!bVar11 * auVar722._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          in_ZMM6._36_4_ = (uint)bVar11 * auVar721._36_4_ | (uint)!bVar11 * auVar722._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          in_ZMM6._40_4_ = (uint)bVar11 * auVar721._40_4_ | (uint)!bVar11 * auVar722._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          in_ZMM6._44_4_ = (uint)bVar11 * auVar721._44_4_ | (uint)!bVar11 * auVar722._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          in_ZMM6._48_4_ = (uint)bVar11 * auVar721._48_4_ | (uint)!bVar11 * auVar722._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          in_ZMM6._52_4_ = (uint)bVar11 * auVar721._52_4_ | (uint)!bVar11 * auVar722._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          in_ZMM6._56_4_ = (uint)bVar11 * auVar721._56_4_ | (uint)!bVar11 * auVar722._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          in_ZMM6._60_4_ = (uint)bVar11 * auVar721._60_4_ | (uint)!bVar11 * auVar722._60_4_;
          auVar720 = vfmadd231ps_avx512f(auVar720,in_ZMM6,auVar718);
          auVar720 = vfmadd231ps_avx512f(auVar720,in_ZMM6,auVar714);
          auVar721 = vfmadd213ps_avx512f(auVar720,(undefined1  [64])afVar408,
                                         (undefined1  [64])afVar409);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,(undefined1  [64])afVar410);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,(undefined1  [64])afVar411);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,(undefined1  [64])afVar412);
          in_ZMM7 = vmulps_avx512f(auVar720,auVar720);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,auVar712);
          auVar720 = vfmadd213ps_avx512f(auVar721,in_ZMM7,auVar720);
          auVar721 = vcvttps2dq_avx512f(in_ZMM6);
          auVar720 = vaddps_avx512f(auVar720,(undefined1  [64])afVar404);
          auVar721 = vpaddd_avx512f(auVar721,auVar713);
          auVar721 = vpslld_avx512f(auVar721,0x17);
          auVar720 = vmulps_avx512f(auVar720,auVar721);
          auVar684 = auVar720._0_32_;
          *(undefined1 (*) [64])outptr = auVar720;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      auVar559._0_4_ = auVar730._0_4_;
      auVar917._0_4_ = auVar730._4_4_;
      auVar914._0_4_ = auVar730._8_4_;
      if ((int)(uVar424 | 1) < (int)uVar422) {
        auVar1419._8_4_ = 0x3f800000;
        auVar1419._0_8_ = 0x3f8000003f800000;
        auVar1419._12_4_ = 0x3f800000;
        auVar1419._16_4_ = 0x3f800000;
        auVar1419._20_4_ = 0x3f800000;
        auVar1419._24_4_ = 0x3f800000;
        auVar1419._28_4_ = 0x3f800000;
        auVar1473._8_4_ = 0x3d9021bb;
        auVar1473._0_8_ = 0x3d9021bb3d9021bb;
        auVar1473._12_4_ = 0x3d9021bb;
        auVar1473._16_4_ = 0x3d9021bb;
        auVar1473._20_4_ = 0x3d9021bb;
        auVar1473._24_4_ = 0x3d9021bb;
        auVar1473._28_4_ = 0x3d9021bb;
        auVar1527._8_4_ = 0xbdebd1b8;
        auVar1527._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1527._12_4_ = 0xbdebd1b8;
        auVar1527._16_4_ = 0xbdebd1b8;
        auVar1527._20_4_ = 0xbdebd1b8;
        auVar1527._24_4_ = 0xbdebd1b8;
        auVar1527._28_4_ = 0xbdebd1b8;
        auVar1581._8_4_ = 0x3def251a;
        auVar1581._0_8_ = 0x3def251a3def251a;
        auVar1581._12_4_ = 0x3def251a;
        auVar1581._16_4_ = 0x3def251a;
        auVar1581._20_4_ = 0x3def251a;
        auVar1581._24_4_ = 0x3def251a;
        auVar1581._28_4_ = 0x3def251a;
        auVar1635._8_4_ = 0xbdfe5d4f;
        auVar1635._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1635._12_4_ = 0xbdfe5d4f;
        auVar1635._16_4_ = 0xbdfe5d4f;
        auVar1635._20_4_ = 0xbdfe5d4f;
        auVar1635._24_4_ = 0xbdfe5d4f;
        auVar1635._28_4_ = 0xbdfe5d4f;
        auVar1689._8_4_ = 0x3e11e9bf;
        auVar1689._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1689._12_4_ = 0x3e11e9bf;
        auVar1689._16_4_ = 0x3e11e9bf;
        auVar1689._20_4_ = 0x3e11e9bf;
        auVar1689._24_4_ = 0x3e11e9bf;
        auVar1689._28_4_ = 0x3e11e9bf;
        auVar1741._8_4_ = 0xbe2aae50;
        auVar1741._0_8_ = 0xbe2aae50be2aae50;
        auVar1741._12_4_ = 0xbe2aae50;
        auVar1741._16_4_ = 0xbe2aae50;
        auVar1741._20_4_ = 0xbe2aae50;
        auVar1741._24_4_ = 0xbe2aae50;
        auVar1741._28_4_ = 0xbe2aae50;
        auVar1792._8_4_ = 0x3e4cceac;
        auVar1792._0_8_ = 0x3e4cceac3e4cceac;
        auVar1792._12_4_ = 0x3e4cceac;
        auVar1792._16_4_ = 0x3e4cceac;
        auVar1792._20_4_ = 0x3e4cceac;
        auVar1792._24_4_ = 0x3e4cceac;
        auVar1792._28_4_ = 0x3e4cceac;
        auVar672 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar676 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar677 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar492 = auVar680._0_16_;
        auVar493 = vxorps_avx512vl(auVar497,auVar497);
        auVar671 = vpcmpeqd_avx2(auVar684,auVar684);
        auVar684 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar681 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar682 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar562 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar563 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar564 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar567 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar872 = uVar424;
        do {
          auVar462 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar916._0_4_ = ptr1[1];
          auVar1094._4_4_ = auVar916._0_4_;
          auVar1094._0_4_ = auVar916._0_4_;
          auVar1094._8_4_ = auVar916._0_4_;
          auVar1094._12_4_ = auVar916._0_4_;
          auVar553 = vinsertf32x4_avx512vl(ZEXT1632(auVar462),auVar1094,1);
          auVar248._8_4_ = 0x800000;
          auVar248._0_8_ = 0x80000000800000;
          auVar248._12_4_ = 0x800000;
          auVar248._16_4_ = 0x800000;
          auVar248._20_4_ = 0x800000;
          auVar248._24_4_ = 0x800000;
          auVar248._28_4_ = 0x800000;
          auVar560 = vmaxps_avx512vl(auVar553,auVar248);
          auVar556 = vpsrld_avx512vl(auVar560,0x17);
          auVar1245._8_4_ = 0x807fffff;
          auVar1245._0_8_ = 0x807fffff807fffff;
          auVar1245._12_4_ = 0x807fffff;
          auVar1245._16_4_ = 0x807fffff;
          auVar1245._20_4_ = 0x807fffff;
          auVar1245._24_4_ = 0x807fffff;
          auVar1245._28_4_ = 0x807fffff;
          auVar249._8_4_ = 0x3f000000;
          auVar249._0_8_ = 0x3f0000003f000000;
          auVar249._12_4_ = 0x3f000000;
          auVar249._16_4_ = 0x3f000000;
          auVar249._20_4_ = 0x3f000000;
          auVar249._24_4_ = 0x3f000000;
          auVar249._28_4_ = 0x3f000000;
          auVar560 = vpternlogd_avx512vl(auVar560,auVar1245,auVar249,0xea);
          auVar250._8_4_ = 0x3f3504f3;
          auVar250._0_8_ = 0x3f3504f33f3504f3;
          auVar250._12_4_ = 0x3f3504f3;
          auVar250._16_4_ = 0x3f3504f3;
          auVar250._20_4_ = 0x3f3504f3;
          auVar250._24_4_ = 0x3f3504f3;
          auVar250._28_4_ = 0x3f3504f3;
          uVar46 = vcmpps_avx512vl(auVar560,auVar250,1);
          auVar251._8_4_ = 0xbf800000;
          auVar251._0_8_ = 0xbf800000bf800000;
          auVar251._12_4_ = 0xbf800000;
          auVar251._16_4_ = 0xbf800000;
          auVar251._20_4_ = 0xbf800000;
          auVar251._24_4_ = 0xbf800000;
          auVar251._28_4_ = 0xbf800000;
          auVar552 = vaddps_avx512vl(auVar560,auVar251);
          auVar560 = vaddps_avx512vl(auVar552,auVar560);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar642._0_4_ = (float)((uint)bVar11 * auVar560._0_4_ | (uint)!bVar11 * auVar552._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar642._4_4_ = (float)((uint)bVar11 * auVar560._4_4_ | (uint)!bVar11 * auVar552._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar642._8_4_ = (float)((uint)bVar11 * auVar560._8_4_ | (uint)!bVar11 * auVar552._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar642._12_4_ =
               (float)((uint)bVar11 * auVar560._12_4_ | (uint)!bVar11 * auVar552._12_4_);
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar642._16_4_ =
               (float)((uint)bVar11 * auVar560._16_4_ | (uint)!bVar11 * auVar552._16_4_);
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar642._20_4_ =
               (float)((uint)bVar11 * auVar560._20_4_ | (uint)!bVar11 * auVar552._20_4_);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar642._24_4_ =
               (float)((uint)bVar11 * auVar560._24_4_ | (uint)!bVar11 * auVar552._24_4_);
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar642._28_4_ = (uint)bVar11 * auVar560._28_4_ | (uint)!bVar11 * auVar552._28_4_;
          auVar560 = vfmadd213ps_avx512vl(auVar1473,auVar642,auVar1527);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar642,auVar1581);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar642,auVar1635);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar642,auVar1689);
          auVar1323._0_4_ = auVar642._0_4_ * auVar642._0_4_;
          auVar1323._4_4_ = auVar642._4_4_ * auVar642._4_4_;
          auVar1323._8_4_ = auVar642._8_4_ * auVar642._8_4_;
          auVar1323._12_4_ = auVar642._12_4_ * auVar642._12_4_;
          auVar1323._16_4_ = auVar642._16_4_ * auVar642._16_4_;
          auVar1323._20_4_ = auVar642._20_4_ * auVar642._20_4_;
          auVar1323._28_36_ = in_ZMM6._28_36_;
          auVar1323._24_4_ = auVar642._24_4_ * auVar642._24_4_;
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar642,auVar1741);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar642,auVar1792);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar642,auVar672);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar642,auVar675);
          auVar1379._0_4_ = auVar1323._0_4_ * auVar642._0_4_;
          auVar1379._4_4_ = auVar1323._4_4_ * auVar642._4_4_;
          auVar1379._8_4_ = auVar1323._8_4_ * auVar642._8_4_;
          auVar1379._12_4_ = auVar1323._12_4_ * auVar642._12_4_;
          auVar1379._16_4_ = auVar1323._16_4_ * auVar642._16_4_;
          auVar1379._20_4_ = auVar1323._20_4_ * auVar642._20_4_;
          auVar1379._28_36_ = in_ZMM7._28_36_;
          auVar1379._24_4_ = auVar1323._24_4_ * auVar642._24_4_;
          auVar552 = vmulps_avx512vl(auVar1379._0_32_,auVar560);
          auVar252._8_4_ = 0xffffff82;
          auVar252._0_8_ = 0xffffff82ffffff82;
          auVar252._12_4_ = 0xffffff82;
          auVar252._16_4_ = 0xffffff82;
          auVar252._20_4_ = 0xffffff82;
          auVar252._24_4_ = 0xffffff82;
          auVar252._28_4_ = 0xffffff82;
          auVar560 = vpaddd_avx512vl(auVar556,auVar252);
          auVar560 = vcvtdq2ps_avx(auVar560);
          auVar556 = vsubps_avx512vl(auVar560,auVar1419);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar643._0_4_ = (uint)bVar11 * auVar556._0_4_ | (uint)!bVar11 * auVar560._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar643._4_4_ = (uint)bVar11 * auVar556._4_4_ | (uint)!bVar11 * auVar560._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar643._8_4_ = (uint)bVar11 * auVar556._8_4_ | (uint)!bVar11 * auVar560._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar643._12_4_ = (uint)bVar11 * auVar556._12_4_ | (uint)!bVar11 * auVar560._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar643._16_4_ = (uint)bVar11 * auVar556._16_4_ | (uint)!bVar11 * auVar560._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar643._20_4_ = (uint)bVar11 * auVar556._20_4_ | (uint)!bVar11 * auVar560._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar643._24_4_ = (uint)bVar11 * auVar556._24_4_ | (uint)!bVar11 * auVar560._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar643._28_4_ = (uint)bVar11 * auVar556._28_4_ | (uint)!bVar11 * auVar560._28_4_;
          auVar560 = vfmadd231ps_avx512vl(auVar552,auVar643,auVar676);
          auVar560 = vfmsub231ps_avx512vl(auVar560,auVar677,auVar1323._0_32_);
          in_ZMM7 = ZEXT3264(auVar560);
          uVar46 = vcmpps_avx512vl(auVar553,ZEXT1632(auVar493),2);
          auVar560 = vsubps_avx(auVar560,auVar642);
          auVar560 = vfmsub231ps_avx512vl(auVar560,auVar680,auVar643);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
          bVar18 = SUB81(uVar46 >> 7,0);
          auVar378._4_4_ =
               (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar560._4_4_) *
               auVar917._0_4_;
          auVar378._0_4_ =
               (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar560._0_4_) *
               auVar559._0_4_;
          auVar378._8_4_ =
               (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar560._8_4_) *
               auVar914._0_4_;
          auVar378._12_4_ =
               (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar560._12_4_) *
               auVar730._12_4_;
          auVar378._16_4_ =
               (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar560._16_4_) *
               auVar559._0_4_;
          auVar378._20_4_ =
               (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar560._20_4_) *
               auVar917._0_4_;
          auVar378._24_4_ =
               (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar560._24_4_) *
               auVar914._0_4_;
          auVar378._28_4_ = (uint)bVar18 * auVar671._28_4_ | (uint)!bVar18 * auVar560._28_4_;
          auVar560 = vminps_avx512vl(auVar378,auVar684);
          auVar553 = vmaxps_avx512vl(auVar560,auVar681);
          auVar556 = vfmadd231ps_avx512vl(auVar677,auVar553,auVar682);
          auVar560 = vroundps_avx(auVar556,1);
          uVar46 = vcmpps_avx512vl(auVar556,auVar560,1);
          auVar556 = vsubps_avx512vl(auVar560,auVar1419);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar644._0_4_ = (float)((uint)bVar11 * auVar556._0_4_ | (uint)!bVar11 * auVar560._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar644._4_4_ = (float)((uint)bVar11 * auVar556._4_4_ | (uint)!bVar11 * auVar560._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar644._8_4_ = (float)((uint)bVar11 * auVar556._8_4_ | (uint)!bVar11 * auVar560._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar644._12_4_ =
               (float)((uint)bVar11 * auVar556._12_4_ | (uint)!bVar11 * auVar560._12_4_);
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar644._16_4_ =
               (float)((uint)bVar11 * auVar556._16_4_ | (uint)!bVar11 * auVar560._16_4_);
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar644._20_4_ =
               (float)((uint)bVar11 * auVar556._20_4_ | (uint)!bVar11 * auVar560._20_4_);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar644._24_4_ =
               (float)((uint)bVar11 * auVar556._24_4_ | (uint)!bVar11 * auVar560._24_4_);
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar644._28_4_ =
               (float)((uint)bVar11 * auVar556._28_4_ | (uint)!bVar11 * auVar560._28_4_);
          auVar560 = vfmsub231ps_avx512vl(auVar553,auVar644,auVar680);
          auVar560 = vfnmsub231ps_avx512vl(auVar560,auVar644,auVar676);
          auVar553 = vfmadd213ps_avx512vl(auVar562,auVar560,auVar563);
          auVar379._4_4_ = auVar560._4_4_ * auVar560._4_4_;
          auVar379._0_4_ = auVar560._0_4_ * auVar560._0_4_;
          auVar379._8_4_ = auVar560._8_4_ * auVar560._8_4_;
          auVar379._12_4_ = auVar560._12_4_ * auVar560._12_4_;
          auVar379._16_4_ = auVar560._16_4_ * auVar560._16_4_;
          auVar379._20_4_ = auVar560._20_4_ * auVar560._20_4_;
          auVar379._24_4_ = auVar560._24_4_ * auVar560._24_4_;
          auVar379._28_4_ = in_ZMM6._28_4_;
          in_ZMM6 = ZEXT3264(auVar379);
          auVar553 = vfmadd213ps_avx512vl(auVar553,auVar560,auVar564);
          auVar553 = vfmadd213ps_avx512vl(auVar553,auVar560,auVar565);
          auVar553 = vfmadd213ps_avx512vl(auVar553,auVar560,auVar566);
          auVar553 = vfmadd213ps_avx512vl(auVar553,auVar560,auVar677);
          auVar462 = vfmadd213ps_fma(auVar553,auVar379,auVar560);
          auVar1123._0_4_ = (int)auVar644._0_4_;
          auVar1123._4_4_ = (int)auVar644._4_4_;
          auVar1123._8_4_ = (int)auVar644._8_4_;
          auVar1123._12_4_ = (int)auVar644._12_4_;
          auVar1123._16_4_ = (int)auVar644._16_4_;
          auVar1123._20_4_ = (int)auVar644._20_4_;
          auVar1123._24_4_ = (int)auVar644._24_4_;
          auVar1123._28_4_ = (int)auVar644._28_4_;
          auVar560 = vpslld_avx2(auVar1123,0x17);
          auVar560 = vpaddd_avx512vl(auVar560,auVar567);
          auVar462 = vfmadd213ps_fma(auVar560,ZEXT1632(auVar462),auVar560);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar462);
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar424 = uVar872 + 2;
          iVar421 = uVar872 + 3;
          uVar872 = uVar424;
          auVar462 = auVar730._0_16_;
        } while (iVar421 < (int)uVar422);
      }
      if ((int)uVar422 <= (int)uVar424) {
        return;
      }
      lVar425 = 0;
      auVar1285._8_4_ = 0xbf800000;
      auVar1285._0_8_ = 0xbf800000bf800000;
      auVar1285._12_4_ = 0xbf800000;
      auVar1344._8_4_ = 0x3f800000;
      auVar1344._0_8_ = 0x3f8000003f800000;
      auVar1344._12_4_ = 0x3f800000;
      auVar1400._8_4_ = 0x3d9021bb;
      auVar1400._0_8_ = 0x3d9021bb3d9021bb;
      auVar1400._12_4_ = 0x3d9021bb;
      auVar1454._8_4_ = 0xbdebd1b8;
      auVar1454._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar1454._12_4_ = 0xbdebd1b8;
      auVar1508._8_4_ = 0x3def251a;
      auVar1508._0_8_ = 0x3def251a3def251a;
      auVar1508._12_4_ = 0x3def251a;
      auVar1562._8_4_ = 0xbdfe5d4f;
      auVar1562._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar1562._12_4_ = 0xbdfe5d4f;
      auVar1616._8_4_ = 0x3e11e9bf;
      auVar1616._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar1616._12_4_ = 0x3e11e9bf;
      auVar1670._8_4_ = 0xbe2aae50;
      auVar1670._0_8_ = 0xbe2aae50be2aae50;
      auVar1670._12_4_ = 0xbe2aae50;
      auVar1724._8_4_ = 0x3e4cceac;
      auVar1724._0_8_ = 0x3e4cceac3e4cceac;
      auVar1724._12_4_ = 0x3e4cceac;
      auVar1775._8_4_ = 0xbe7ffffc;
      auVar1775._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar1775._12_4_ = 0xbe7ffffc;
      auVar493 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
      auVar516 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
      auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
      auVar496 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
      auVar492 = vxorps_avx512vl(auVar492,auVar492);
      auVar462 = vpcmpeqd_avx(auVar462,auVar462);
      auVar497 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
      auVar498 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
      auVar501 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
      auVar502 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
      auVar520 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
      auVar439 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
      auVar440 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
      auVar441 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
      auVar442 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
      do {
        auVar436 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[lVar425]));
        auVar111._8_4_ = 0x800000;
        auVar111._0_8_ = 0x80000000800000;
        auVar111._12_4_ = 0x800000;
        auVar443 = vmaxps_avx512vl(auVar436,auVar111);
        auVar437 = vpsrld_avx512vl(auVar443,0x17);
        auVar1111._8_4_ = 0x807fffff;
        auVar1111._0_8_ = 0x807fffff807fffff;
        auVar1111._12_4_ = 0x807fffff;
        auVar112._8_4_ = 0x3f000000;
        auVar112._0_8_ = 0x3f0000003f000000;
        auVar112._12_4_ = 0x3f000000;
        auVar443 = vpternlogd_avx512vl(auVar443,auVar1111,auVar112,0xea);
        auVar113._8_4_ = 0x3f3504f3;
        auVar113._0_8_ = 0x3f3504f33f3504f3;
        auVar113._12_4_ = 0x3f3504f3;
        uVar46 = vcmpps_avx512vl(auVar443,auVar113,1);
        auVar431 = vaddps_avx512vl(auVar443,auVar1285);
        auVar443 = vaddps_avx512vl(auVar431,auVar443);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar540._0_4_ = (float)((uint)bVar11 * auVar443._0_4_ | (uint)!bVar11 * auVar431._0_4_);
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar540._4_4_ = (float)((uint)bVar11 * auVar443._4_4_ | (uint)!bVar11 * auVar431._4_4_);
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar540._8_4_ = (float)((uint)bVar11 * auVar443._8_4_ | (uint)!bVar11 * auVar431._8_4_);
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar540._12_4_ = (float)((uint)bVar11 * auVar443._12_4_ | (uint)!bVar11 * auVar431._12_4_);
        auVar443 = vfmadd213ps_avx512vl(auVar1400,auVar540,auVar1454);
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar540,auVar1508);
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar540,auVar1562);
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar540,auVar1616);
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar540,auVar1670);
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar540,auVar1724);
        auVar1166._0_4_ = auVar540._0_4_ * auVar540._0_4_;
        auVar1166._4_4_ = auVar540._4_4_ * auVar540._4_4_;
        auVar1166._8_4_ = auVar540._8_4_ * auVar540._8_4_;
        auVar1166._12_4_ = auVar540._12_4_ * auVar540._12_4_;
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar540,auVar1775);
        auVar443 = vfmadd213ps_avx512vl(auVar443,auVar540,auVar493);
        auVar1220._0_4_ = auVar1166._0_4_ * auVar540._0_4_;
        auVar1220._4_4_ = auVar1166._4_4_ * auVar540._4_4_;
        auVar1220._8_4_ = auVar1166._8_4_ * auVar540._8_4_;
        auVar1220._12_4_ = auVar1166._12_4_ * auVar540._12_4_;
        auVar431 = vmulps_avx512vl(auVar1220,auVar443);
        auVar114._8_4_ = 0xffffff82;
        auVar114._0_8_ = 0xffffff82ffffff82;
        auVar114._12_4_ = 0xffffff82;
        auVar443 = vpaddd_avx512vl(auVar437,auVar114);
        auVar443 = vcvtdq2ps_avx(auVar443);
        auVar437 = vsubps_avx512vl(auVar443,auVar1344);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar541._0_4_ = (uint)bVar11 * auVar437._0_4_ | (uint)!bVar11 * auVar443._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar541._4_4_ = (uint)bVar11 * auVar437._4_4_ | (uint)!bVar11 * auVar443._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar541._8_4_ = (uint)bVar11 * auVar437._8_4_ | (uint)!bVar11 * auVar443._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar541._12_4_ = (uint)bVar11 * auVar437._12_4_ | (uint)!bVar11 * auVar443._12_4_;
        auVar443 = vfmadd231ps_avx512vl(auVar431,auVar541,auVar516);
        auVar443 = vfmsub231ps_avx512vl(auVar443,auVar504,auVar1166);
        auVar443 = vsubps_avx(auVar443,auVar540);
        auVar443 = vfmsub231ps_avx512vl(auVar443,auVar496,auVar541);
        uVar46 = vcmpps_avx512vl(auVar436,auVar492,2);
        bVar11 = (bool)((byte)uVar46 & 1);
        bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar1034._0_4_ =
             (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar443._0_4_) *
             auVar559._0_4_;
        auVar1034._4_4_ =
             (float)((uint)bVar12 * auVar462._4_4_ | (uint)!bVar12 * auVar443._4_4_) *
             auVar917._0_4_;
        auVar1034._8_4_ =
             (float)((uint)bVar13 * auVar462._8_4_ | (uint)!bVar13 * auVar443._8_4_) *
             auVar914._0_4_;
        auVar1034._12_4_ =
             (float)((uint)bVar14 * auVar462._12_4_ | (uint)!bVar14 * auVar443._12_4_) *
             auVar730._12_4_;
        auVar443 = vminps_avx512vl(auVar1034,auVar497);
        auVar436 = vmaxps_avx512vl(auVar443,auVar498);
        auVar437 = vfmadd231ps_avx512vl(auVar504,auVar436,auVar501);
        auVar1167._0_4_ = (int)auVar437._0_4_;
        auVar1167._4_4_ = (int)auVar437._4_4_;
        auVar1167._8_4_ = (int)auVar437._8_4_;
        auVar1167._12_4_ = (int)auVar437._12_4_;
        auVar443 = vcvtdq2ps_avx(auVar1167);
        uVar46 = vcmpps_avx512vl(auVar437,auVar443,1);
        auVar437 = vsubps_avx512vl(auVar443,auVar1344);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar542._0_4_ = (float)((uint)bVar11 * auVar437._0_4_ | (uint)!bVar11 * auVar443._0_4_);
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar542._4_4_ = (float)((uint)bVar11 * auVar437._4_4_ | (uint)!bVar11 * auVar443._4_4_);
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar542._8_4_ = (float)((uint)bVar11 * auVar437._8_4_ | (uint)!bVar11 * auVar443._8_4_);
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar542._12_4_ = (float)((uint)bVar11 * auVar437._12_4_ | (uint)!bVar11 * auVar443._12_4_);
        auVar443 = vfmsub231ps_avx512vl(auVar436,auVar542,auVar496);
        auVar443 = vfnmsub231ps_avx512vl(auVar443,auVar542,auVar516);
        auVar436 = vfmadd213ps_avx512vl(auVar502,auVar443,auVar520);
        auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar439);
        auVar1221._0_4_ = auVar443._0_4_ * auVar443._0_4_;
        auVar1221._4_4_ = auVar443._4_4_ * auVar443._4_4_;
        auVar1221._8_4_ = auVar443._8_4_ * auVar443._8_4_;
        auVar1221._12_4_ = auVar443._12_4_ * auVar443._12_4_;
        auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar440);
        auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar441);
        auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar504);
        auVar443 = vfmadd213ps_fma(auVar436,auVar1221,auVar443);
        auVar1035._0_4_ = (int)auVar542._0_4_;
        auVar1035._4_4_ = (int)auVar542._4_4_;
        auVar1035._8_4_ = (int)auVar542._8_4_;
        auVar1035._12_4_ = (int)auVar542._12_4_;
        auVar436 = vpslld_avx(auVar1035,0x17);
        auVar436 = vpaddd_avx512vl(auVar436,auVar442);
        auVar443 = vfmadd213ps_fma(auVar436,auVar443,auVar436);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar443;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        lVar425 = lVar425 + 1;
      } while (uVar422 - uVar424 != (int)lVar425);
      return;
    }
    if (aw == bw) {
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        in_ZMM3 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar730 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar713 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar714 = vpxord_avx512f(in_ZMM3,auVar712);
        auVar715 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar716 = vpxord_avx512f(auVar715,auVar712);
        auVar712 = vpxord_avx512f(auVar713,auVar712);
        iVar421 = 0xf;
        auVar462 = vxorps_avx512vl(auVar504,auVar504);
        auVar717 = vpternlogd_avx512f(in_ZMM29,in_ZMM29,in_ZMM29,0xff);
        do {
          auVar718 = vmaxps_avx512f(*(undefined1 (*) [64])ptr1,(undefined1  [64])_ps512_min_norm_pos
                                   );
          auVar719 = vpsrld_avx512f(auVar718,0x17);
          auVar718 = vpternlogd_avx512f(auVar718,in_ZMM3,(undefined1  [64])_ps512_inv_mant_mask,0xec
                                       );
          uVar46 = vcmpps_avx512f(auVar718,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar720 = vsubps_avx512f(auVar718,(undefined1  [64])afVar404);
          auVar718 = vaddps_avx512f(auVar720,auVar718);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar733._0_4_ = (uint)bVar11 * auVar718._0_4_ | (uint)!bVar11 * auVar720._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar733._4_4_ = (uint)bVar11 * auVar718._4_4_ | (uint)!bVar11 * auVar720._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar733._8_4_ = (uint)bVar11 * auVar718._8_4_ | (uint)!bVar11 * auVar720._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar733._12_4_ = (uint)bVar11 * auVar718._12_4_ | (uint)!bVar11 * auVar720._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar733._16_4_ = (uint)bVar11 * auVar718._16_4_ | (uint)!bVar11 * auVar720._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar733._20_4_ = (uint)bVar11 * auVar718._20_4_ | (uint)!bVar11 * auVar720._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar733._24_4_ = (uint)bVar11 * auVar718._24_4_ | (uint)!bVar11 * auVar720._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar733._28_4_ = (uint)bVar11 * auVar718._28_4_ | (uint)!bVar11 * auVar720._28_4_;
          bVar28 = (byte)(uVar46 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar733._32_4_ = (uint)bVar11 * auVar718._32_4_ | (uint)!bVar11 * auVar720._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar733._36_4_ = (uint)bVar11 * auVar718._36_4_ | (uint)!bVar11 * auVar720._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar733._40_4_ = (uint)bVar11 * auVar718._40_4_ | (uint)!bVar11 * auVar720._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar733._44_4_ = (uint)bVar11 * auVar718._44_4_ | (uint)!bVar11 * auVar720._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar733._48_4_ = (uint)bVar11 * auVar718._48_4_ | (uint)!bVar11 * auVar720._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar733._52_4_ = (uint)bVar11 * auVar718._52_4_ | (uint)!bVar11 * auVar720._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar733._56_4_ = (uint)bVar11 * auVar718._56_4_ | (uint)!bVar11 * auVar720._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar733._60_4_ = (uint)bVar11 * auVar718._60_4_ | (uint)!bVar11 * auVar720._60_4_;
          auVar718 = vfmadd132ps_avx512f(auVar733,(undefined1  [64])afVar413,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar733,(undefined1  [64])afVar414);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar733,(undefined1  [64])afVar415);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar733,(undefined1  [64])afVar416);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar733,(undefined1  [64])afVar417);
          auVar720 = vmulps_avx512f(auVar733,auVar733);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar733,(undefined1  [64])afVar418);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar733,(undefined1  [64])afVar419);
          auVar721 = vmulps_avx512f(auVar720,auVar733);
          auVar718 = vfmadd213ps_avx512f(auVar718,auVar733,(undefined1  [64])afVar420);
          auVar718 = vfmadd213ps_avx512f(auVar721,auVar718,auVar733);
          auVar719 = vpsubd_avx512f(auVar719,auVar730);
          auVar719 = vcvtdq2ps_avx512f(auVar719);
          auVar721 = vaddps_avx512f(auVar719,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar734._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar721._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar734._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar721._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar734._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar721._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar734._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar721._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar734._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar721._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar734._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar721._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar734._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar721._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar734._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar721._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar734._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar721._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar734._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar721._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar734._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar721._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar734._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar721._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar734._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar721._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar734._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar721._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar734._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar721._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar734._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar721._60_4_;
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar734,auVar713);
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar714,auVar720);
          uVar46 = vcmpps_avx512f(*(undefined1 (*) [64])ptr1,ZEXT1664(auVar462),2);
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar715,auVar734);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar735._0_4_ = (uint)bVar11 * auVar717._0_4_ | (uint)!bVar11 * auVar718._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar735._4_4_ = (uint)bVar11 * auVar717._4_4_ | (uint)!bVar11 * auVar718._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar735._8_4_ = (uint)bVar11 * auVar717._8_4_ | (uint)!bVar11 * auVar718._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar735._12_4_ = (uint)bVar11 * auVar717._12_4_ | (uint)!bVar11 * auVar718._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar735._16_4_ = (uint)bVar11 * auVar717._16_4_ | (uint)!bVar11 * auVar718._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar735._20_4_ = (uint)bVar11 * auVar717._20_4_ | (uint)!bVar11 * auVar718._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar735._24_4_ = (uint)bVar11 * auVar717._24_4_ | (uint)!bVar11 * auVar718._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar735._28_4_ = (uint)bVar11 * auVar717._28_4_ | (uint)!bVar11 * auVar718._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar735._32_4_ = (uint)bVar11 * auVar717._32_4_ | (uint)!bVar11 * auVar718._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar735._36_4_ = (uint)bVar11 * auVar717._36_4_ | (uint)!bVar11 * auVar718._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar735._40_4_ = (uint)bVar11 * auVar717._40_4_ | (uint)!bVar11 * auVar718._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar735._44_4_ = (uint)bVar11 * auVar717._44_4_ | (uint)!bVar11 * auVar718._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar735._48_4_ = (uint)bVar11 * auVar717._48_4_ | (uint)!bVar11 * auVar718._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar735._52_4_ = (uint)bVar11 * auVar717._52_4_ | (uint)!bVar11 * auVar718._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar735._56_4_ = (uint)bVar11 * auVar717._56_4_ | (uint)!bVar11 * auVar718._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar735._60_4_ = (uint)bVar11 * auVar717._60_4_ | (uint)!bVar11 * auVar718._60_4_;
          auVar718 = vmulps_avx512f(auVar735,*(undefined1 (*) [64])ptr);
          auVar718 = vminps_avx512f(auVar718,(undefined1  [64])afVar405);
          auVar718 = vmaxps_avx512f(auVar718,(undefined1  [64])afVar406);
          auVar719 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar718,in_ZMM3);
          auVar720 = vrndscaleps_avx512f(auVar719,1);
          uVar46 = vcmpps_avx512f(auVar719,auVar720,1);
          auVar719 = vsubps_avx512f(auVar720,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar736._0_4_ = (uint)bVar11 * auVar719._0_4_ | (uint)!bVar11 * auVar720._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar736._4_4_ = (uint)bVar11 * auVar719._4_4_ | (uint)!bVar11 * auVar720._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar736._8_4_ = (uint)bVar11 * auVar719._8_4_ | (uint)!bVar11 * auVar720._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar736._12_4_ = (uint)bVar11 * auVar719._12_4_ | (uint)!bVar11 * auVar720._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar736._16_4_ = (uint)bVar11 * auVar719._16_4_ | (uint)!bVar11 * auVar720._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar736._20_4_ = (uint)bVar11 * auVar719._20_4_ | (uint)!bVar11 * auVar720._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar736._24_4_ = (uint)bVar11 * auVar719._24_4_ | (uint)!bVar11 * auVar720._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar736._28_4_ = (uint)bVar11 * auVar719._28_4_ | (uint)!bVar11 * auVar720._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar736._32_4_ = (uint)bVar11 * auVar719._32_4_ | (uint)!bVar11 * auVar720._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar736._36_4_ = (uint)bVar11 * auVar719._36_4_ | (uint)!bVar11 * auVar720._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar736._40_4_ = (uint)bVar11 * auVar719._40_4_ | (uint)!bVar11 * auVar720._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar736._44_4_ = (uint)bVar11 * auVar719._44_4_ | (uint)!bVar11 * auVar720._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar736._48_4_ = (uint)bVar11 * auVar719._48_4_ | (uint)!bVar11 * auVar720._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar736._52_4_ = (uint)bVar11 * auVar719._52_4_ | (uint)!bVar11 * auVar720._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar736._56_4_ = (uint)bVar11 * auVar719._56_4_ | (uint)!bVar11 * auVar720._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar736._60_4_ = (uint)bVar11 * auVar719._60_4_ | (uint)!bVar11 * auVar720._60_4_;
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar736,auVar716);
          auVar718 = vfmadd231ps_avx512f(auVar718,auVar736,auVar712);
          auVar719 = vfmadd213ps_avx512f(auVar718,(undefined1  [64])afVar408,
                                         (undefined1  [64])afVar409);
          auVar720 = vmulps_avx512f(auVar718,auVar718);
          auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar410);
          auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar411);
          auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,(undefined1  [64])afVar412);
          auVar719 = vfmadd213ps_avx512f(auVar719,auVar718,in_ZMM3);
          auVar718 = vfmadd213ps_avx512f(auVar719,auVar720,auVar718);
          auVar718 = vaddps_avx512f(auVar718,(undefined1  [64])afVar404);
          auVar719 = vcvttps2dq_avx512f(auVar736);
          auVar719 = vpaddd_avx512f(auVar719,auVar730);
          in_ZMM2 = vpslld_avx512f(auVar719,0x17);
          auVar718 = vmulps_avx512f(auVar718,in_ZMM2);
          *(undefined1 (*) [64])outptr = auVar718;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
        auVar462 = auVar493;
        auVar671 = auVar675;
      }
      auVar492 = auVar671._0_16_;
      if ((int)(uVar422 | 7) < (int)uVar424) {
        auVar1171._8_4_ = 0x3f3504f3;
        auVar1171._0_8_ = 0x3f3504f33f3504f3;
        auVar1171._12_4_ = 0x3f3504f3;
        auVar1171._16_4_ = 0x3f3504f3;
        auVar1171._20_4_ = 0x3f3504f3;
        auVar1171._24_4_ = 0x3f3504f3;
        auVar1171._28_4_ = 0x3f3504f3;
        auVar1226._8_4_ = 0xbf800000;
        auVar1226._0_8_ = 0xbf800000bf800000;
        auVar1226._12_4_ = 0xbf800000;
        auVar1226._16_4_ = 0xbf800000;
        auVar1226._20_4_ = 0xbf800000;
        auVar1226._24_4_ = 0xbf800000;
        auVar1226._28_4_ = 0xbf800000;
        auVar1288._8_4_ = 0x3f800000;
        auVar1288._0_8_ = 0x3f8000003f800000;
        auVar1288._12_4_ = 0x3f800000;
        auVar1288._16_4_ = 0x3f800000;
        auVar1288._20_4_ = 0x3f800000;
        auVar1288._24_4_ = 0x3f800000;
        auVar1288._28_4_ = 0x3f800000;
        auVar1347._8_4_ = 0x3d9021bb;
        auVar1347._0_8_ = 0x3d9021bb3d9021bb;
        auVar1347._12_4_ = 0x3d9021bb;
        auVar1347._16_4_ = 0x3d9021bb;
        auVar1347._20_4_ = 0x3d9021bb;
        auVar1347._24_4_ = 0x3d9021bb;
        auVar1347._28_4_ = 0x3d9021bb;
        auVar1403._8_4_ = 0xbdebd1b8;
        auVar1403._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1403._12_4_ = 0xbdebd1b8;
        auVar1403._16_4_ = 0xbdebd1b8;
        auVar1403._20_4_ = 0xbdebd1b8;
        auVar1403._24_4_ = 0xbdebd1b8;
        auVar1403._28_4_ = 0xbdebd1b8;
        auVar1457._8_4_ = 0x3def251a;
        auVar1457._0_8_ = 0x3def251a3def251a;
        auVar1457._12_4_ = 0x3def251a;
        auVar1457._16_4_ = 0x3def251a;
        auVar1457._20_4_ = 0x3def251a;
        auVar1457._24_4_ = 0x3def251a;
        auVar1457._28_4_ = 0x3def251a;
        auVar1511._8_4_ = 0xbdfe5d4f;
        auVar1511._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1511._12_4_ = 0xbdfe5d4f;
        auVar1511._16_4_ = 0xbdfe5d4f;
        auVar1511._20_4_ = 0xbdfe5d4f;
        auVar1511._24_4_ = 0xbdfe5d4f;
        auVar1511._28_4_ = 0xbdfe5d4f;
        auVar1565._8_4_ = 0x3e11e9bf;
        auVar1565._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1565._12_4_ = 0x3e11e9bf;
        auVar1565._16_4_ = 0x3e11e9bf;
        auVar1565._20_4_ = 0x3e11e9bf;
        auVar1565._24_4_ = 0x3e11e9bf;
        auVar1565._28_4_ = 0x3e11e9bf;
        auVar1619._8_4_ = 0xbe2aae50;
        auVar1619._0_8_ = 0xbe2aae50be2aae50;
        auVar1619._12_4_ = 0xbe2aae50;
        auVar1619._16_4_ = 0xbe2aae50;
        auVar1619._20_4_ = 0xbe2aae50;
        auVar1619._24_4_ = 0xbe2aae50;
        auVar1619._28_4_ = 0xbe2aae50;
        auVar1673._8_4_ = 0x3e4cceac;
        auVar1673._0_8_ = 0x3e4cceac3e4cceac;
        auVar1673._12_4_ = 0x3e4cceac;
        auVar1673._16_4_ = 0x3e4cceac;
        auVar1673._20_4_ = 0x3e4cceac;
        auVar1673._24_4_ = 0x3e4cceac;
        auVar1673._28_4_ = 0x3e4cceac;
        auVar1726._8_4_ = 0xbe7ffffc;
        auVar1726._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1726._12_4_ = 0xbe7ffffc;
        auVar1726._16_4_ = 0xbe7ffffc;
        auVar1726._20_4_ = 0xbe7ffffc;
        auVar1726._24_4_ = 0xbe7ffffc;
        auVar1726._28_4_ = 0xbe7ffffc;
        auVar1777._8_4_ = 0x3eaaaaaa;
        auVar1777._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar1777._12_4_ = 0x3eaaaaaa;
        auVar1777._16_4_ = 0x3eaaaaaa;
        auVar1777._20_4_ = 0x3eaaaaaa;
        auVar1777._24_4_ = 0x3eaaaaaa;
        auVar1777._28_4_ = 0x3eaaaaaa;
        auVar672 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar684 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar462 = vxorps_avx512vl(auVar462,auVar462);
        auVar671 = vpcmpeqd_avx2(auVar671,auVar671);
        auVar492 = auVar671._0_16_;
        auVar676 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar677 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar680 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar681 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar682 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar562 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar563 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar564 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar565 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar872 = uVar422;
        do {
          auVar202._8_4_ = 0x800000;
          auVar202._0_8_ = 0x80000000800000;
          auVar202._12_4_ = 0x800000;
          auVar202._16_4_ = 0x800000;
          auVar202._20_4_ = 0x800000;
          auVar202._24_4_ = 0x800000;
          auVar202._28_4_ = 0x800000;
          auVar566 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,auVar202);
          auVar567 = vpsrld_avx512vl(auVar566,0x17);
          auVar958._8_4_ = 0x807fffff;
          auVar958._0_8_ = 0x807fffff807fffff;
          auVar958._12_4_ = 0x807fffff;
          auVar958._16_4_ = 0x807fffff;
          auVar958._20_4_ = 0x807fffff;
          auVar958._24_4_ = 0x807fffff;
          auVar958._28_4_ = 0x807fffff;
          auVar203._8_4_ = 0x3f000000;
          auVar203._0_8_ = 0x3f0000003f000000;
          auVar203._12_4_ = 0x3f000000;
          auVar203._16_4_ = 0x3f000000;
          auVar203._20_4_ = 0x3f000000;
          auVar203._24_4_ = 0x3f000000;
          auVar203._28_4_ = 0x3f000000;
          auVar566 = vpternlogd_avx512vl(auVar566,auVar958,auVar203,0xea);
          uVar46 = vcmpps_avx512vl(auVar566,auVar1171,1);
          auVar559 = vaddps_avx512vl(auVar566,auVar1226);
          auVar566 = vaddps_avx512vl(auVar559,auVar566);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar568._0_4_ = (float)((uint)bVar11 * auVar566._0_4_ | (uint)!bVar11 * auVar559._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar568._4_4_ = (float)((uint)bVar11 * auVar566._4_4_ | (uint)!bVar11 * auVar559._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar568._8_4_ = (float)((uint)bVar11 * auVar566._8_4_ | (uint)!bVar11 * auVar559._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar568._12_4_ =
               (float)((uint)bVar11 * auVar566._12_4_ | (uint)!bVar11 * auVar559._12_4_);
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar568._16_4_ =
               (float)((uint)bVar11 * auVar566._16_4_ | (uint)!bVar11 * auVar559._16_4_);
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar568._20_4_ =
               (float)((uint)bVar11 * auVar566._20_4_ | (uint)!bVar11 * auVar559._20_4_);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar568._24_4_ =
               (float)((uint)bVar11 * auVar566._24_4_ | (uint)!bVar11 * auVar559._24_4_);
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar568._28_4_ = (uint)bVar11 * auVar566._28_4_ | (uint)!bVar11 * auVar559._28_4_;
          auVar566 = vfmadd213ps_avx512vl(auVar1347,auVar568,auVar1403);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar568,auVar1457);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar568,auVar1511);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar568,auVar1565);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar568,auVar1619);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar568,auVar1673);
          auVar1085._0_4_ = auVar568._0_4_ * auVar568._0_4_;
          auVar1085._4_4_ = auVar568._4_4_ * auVar568._4_4_;
          auVar1085._8_4_ = auVar568._8_4_ * auVar568._8_4_;
          auVar1085._12_4_ = auVar568._12_4_ * auVar568._12_4_;
          auVar1085._16_4_ = auVar568._16_4_ * auVar568._16_4_;
          auVar1085._20_4_ = auVar568._20_4_ * auVar568._20_4_;
          auVar1085._28_36_ = in_ZMM2._28_36_;
          auVar1085._24_4_ = auVar568._24_4_ * auVar568._24_4_;
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar568,auVar1726);
          auVar566 = vfmadd213ps_avx512vl(auVar566,auVar568,auVar1777);
          auVar1138._0_4_ = auVar1085._0_4_ * auVar568._0_4_;
          auVar1138._4_4_ = auVar1085._4_4_ * auVar568._4_4_;
          auVar1138._8_4_ = auVar1085._8_4_ * auVar568._8_4_;
          auVar1138._12_4_ = auVar1085._12_4_ * auVar568._12_4_;
          auVar1138._16_4_ = auVar1085._16_4_ * auVar568._16_4_;
          auVar1138._20_4_ = auVar1085._20_4_ * auVar568._20_4_;
          auVar1138._28_36_ = in_ZMM3._28_36_;
          auVar1138._24_4_ = auVar1085._24_4_ * auVar568._24_4_;
          auVar566 = vmulps_avx512vl(auVar1138._0_32_,auVar566);
          auVar204._8_4_ = 0xffffff82;
          auVar204._0_8_ = 0xffffff82ffffff82;
          auVar204._12_4_ = 0xffffff82;
          auVar204._16_4_ = 0xffffff82;
          auVar204._20_4_ = 0xffffff82;
          auVar204._24_4_ = 0xffffff82;
          auVar204._28_4_ = 0xffffff82;
          auVar567 = vpaddd_avx512vl(auVar567,auVar204);
          auVar567 = vcvtdq2ps_avx512vl(auVar567);
          auVar559 = vsubps_avx512vl(auVar567,auVar1288);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar569._0_4_ = (uint)bVar11 * auVar559._0_4_ | (uint)!bVar11 * auVar567._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar569._4_4_ = (uint)bVar11 * auVar559._4_4_ | (uint)!bVar11 * auVar567._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar569._8_4_ = (uint)bVar11 * auVar559._8_4_ | (uint)!bVar11 * auVar567._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar569._12_4_ = (uint)bVar11 * auVar559._12_4_ | (uint)!bVar11 * auVar567._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar569._16_4_ = (uint)bVar11 * auVar559._16_4_ | (uint)!bVar11 * auVar567._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar569._20_4_ = (uint)bVar11 * auVar559._20_4_ | (uint)!bVar11 * auVar567._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar569._24_4_ = (uint)bVar11 * auVar559._24_4_ | (uint)!bVar11 * auVar567._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar569._28_4_ = (uint)bVar11 * auVar559._28_4_ | (uint)!bVar11 * auVar567._28_4_;
          auVar566 = vfmadd231ps_avx512vl(auVar566,auVar569,auVar672);
          auVar566 = vfmsub231ps_avx512vl(auVar566,auVar675,auVar1085._0_32_);
          auVar566 = vsubps_avx(auVar566,auVar568);
          auVar566 = vfmsub231ps_avx512vl(auVar566,auVar684,auVar569);
          uVar46 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,
                                   ZEXT1632(auVar462),2);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
          bVar18 = SUB81(uVar46 >> 7,0);
          auVar369._4_4_ =
               (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar566._4_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar369._0_4_ =
               (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar566._0_4_) *
               *(float *)*(undefined1 (*) [64])ptr;
          auVar369._8_4_ =
               (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar566._8_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar369._12_4_ =
               (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar566._12_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar369._16_4_ =
               (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar566._16_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          auVar369._20_4_ =
               (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar566._20_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          auVar369._24_4_ =
               (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar566._24_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          auVar369._28_4_ = (uint)bVar18 * auVar671._28_4_ | (uint)!bVar18 * auVar566._28_4_;
          auVar566 = vminps_avx512vl(auVar369,auVar676);
          auVar567 = vmaxps_avx512vl(auVar566,auVar677);
          auVar559 = vfmadd231ps_avx512vl(auVar675,auVar567,auVar680);
          auVar566 = vroundps_avx(auVar559,1);
          uVar46 = vcmpps_avx512vl(auVar559,auVar566,1);
          auVar559 = vsubps_avx512vl(auVar566,auVar1288);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar570._0_4_ = (float)((uint)bVar11 * auVar559._0_4_ | (uint)!bVar11 * auVar566._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar570._4_4_ = (float)((uint)bVar11 * auVar559._4_4_ | (uint)!bVar11 * auVar566._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar570._8_4_ = (float)((uint)bVar11 * auVar559._8_4_ | (uint)!bVar11 * auVar566._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar570._12_4_ =
               (float)((uint)bVar11 * auVar559._12_4_ | (uint)!bVar11 * auVar566._12_4_);
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar570._16_4_ =
               (float)((uint)bVar11 * auVar559._16_4_ | (uint)!bVar11 * auVar566._16_4_);
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar570._20_4_ =
               (float)((uint)bVar11 * auVar559._20_4_ | (uint)!bVar11 * auVar566._20_4_);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar570._24_4_ =
               (float)((uint)bVar11 * auVar559._24_4_ | (uint)!bVar11 * auVar566._24_4_);
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar570._28_4_ =
               (float)((uint)bVar11 * auVar559._28_4_ | (uint)!bVar11 * auVar566._28_4_);
          in_ZMM3 = ZEXT3264(auVar570);
          auVar566 = vfmsub231ps_avx512vl(auVar567,auVar570,auVar684);
          auVar566 = vfnmsub231ps_avx512vl(auVar566,auVar570,auVar672);
          auVar567 = vfmadd213ps_avx512vl(auVar681,auVar566,auVar682);
          auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar562);
          auVar559 = vmulps_avx512vl(auVar566,auVar566);
          auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar563);
          auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar564);
          auVar567 = vfmadd213ps_avx512vl(auVar567,auVar566,auVar675);
          auVar566 = vfmadd213ps_avx512vl(auVar567,auVar559,auVar566);
          in_ZMM2 = ZEXT3264(auVar566);
          auVar959._0_4_ = (int)auVar570._0_4_;
          auVar959._4_4_ = (int)auVar570._4_4_;
          auVar959._8_4_ = (int)auVar570._8_4_;
          auVar959._12_4_ = (int)auVar570._12_4_;
          auVar959._16_4_ = (int)auVar570._16_4_;
          auVar959._20_4_ = (int)auVar570._20_4_;
          auVar959._24_4_ = (int)auVar570._24_4_;
          auVar959._28_4_ = (int)auVar570._28_4_;
          auVar567 = vpslld_avx2(auVar959,0x17);
          auVar567 = vpaddd_avx512vl(auVar567,auVar565);
          auVar493 = vfmadd213ps_fma(auVar567,auVar566,auVar567);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar493);
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar422 = uVar872 + 8;
          iVar421 = uVar872 + 0xf;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if ((int)(uVar422 | 3) < (int)uVar424) {
        auVar1089._8_4_ = 0xffffff82;
        auVar1089._0_8_ = 0xffffff82ffffff82;
        auVar1089._12_4_ = 0xffffff82;
        auVar1143._8_4_ = 0x3f3504f3;
        auVar1143._0_8_ = 0x3f3504f33f3504f3;
        auVar1143._12_4_ = 0x3f3504f3;
        auVar1197._8_4_ = 0xbf800000;
        auVar1197._0_8_ = 0xbf800000bf800000;
        auVar1197._12_4_ = 0xbf800000;
        auVar1261._8_4_ = 0x3f800000;
        auVar1261._0_8_ = 0x3f8000003f800000;
        auVar1261._12_4_ = 0x3f800000;
        auVar1324._8_4_ = 0x3d9021bb;
        auVar1324._0_8_ = 0x3d9021bb3d9021bb;
        auVar1324._12_4_ = 0x3d9021bb;
        auVar1380._8_4_ = 0xbdebd1b8;
        auVar1380._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1380._12_4_ = 0xbdebd1b8;
        auVar1434._8_4_ = 0x3def251a;
        auVar1434._0_8_ = 0x3def251a3def251a;
        auVar1434._12_4_ = 0x3def251a;
        auVar1488._8_4_ = 0xbdfe5d4f;
        auVar1488._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1488._12_4_ = 0xbdfe5d4f;
        auVar1542._8_4_ = 0x3e11e9bf;
        auVar1542._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1542._12_4_ = 0x3e11e9bf;
        auVar1596._8_4_ = 0xbe2aae50;
        auVar1596._0_8_ = 0xbe2aae50be2aae50;
        auVar1596._12_4_ = 0xbe2aae50;
        auVar1650._8_4_ = 0x3e4cceac;
        auVar1650._0_8_ = 0x3e4cceac3e4cceac;
        auVar1650._12_4_ = 0x3e4cceac;
        auVar1704._8_4_ = 0xbe7ffffc;
        auVar1704._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1704._12_4_ = 0xbe7ffffc;
        auVar1757._8_4_ = 0x3eaaaaaa;
        auVar1757._0_8_ = 0x3eaaaaaa3eaaaaaa;
        auVar1757._12_4_ = 0x3eaaaaaa;
        auVar493 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar516 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar496 = vxorps_avx512vl(auVar462,auVar462);
        auVar462 = vpcmpeqd_avx(auVar492,auVar492);
        auVar492 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar497 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar501 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar502 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar520 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar439 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar440 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar441 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar872 = uVar422;
        do {
          auVar73._8_4_ = 0x800000;
          auVar73._0_8_ = 0x80000000800000;
          auVar73._12_4_ = 0x800000;
          auVar442 = vmaxps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,auVar73);
          auVar443 = vpsrld_avx512vl(auVar442,0x17);
          auVar919._8_4_ = 0x807fffff;
          auVar919._0_8_ = 0x807fffff807fffff;
          auVar919._12_4_ = 0x807fffff;
          auVar74._8_4_ = 0x3f000000;
          auVar74._0_8_ = 0x3f0000003f000000;
          auVar74._12_4_ = 0x3f000000;
          auVar442 = vpternlogd_avx512vl(auVar442,auVar919,auVar74,0xea);
          uVar46 = vcmpps_avx512vl(auVar442,auVar1143,1);
          auVar436 = vaddps_avx512vl(auVar442,auVar1197);
          auVar442 = vaddps_avx512vl(auVar436,auVar442);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar444._0_4_ = (uint)bVar11 * auVar442._0_4_ | (uint)!bVar11 * auVar436._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar444._4_4_ = (uint)bVar11 * auVar442._4_4_ | (uint)!bVar11 * auVar436._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar444._8_4_ = (uint)bVar11 * auVar442._8_4_ | (uint)!bVar11 * auVar436._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar444._12_4_ = (uint)bVar11 * auVar442._12_4_ | (uint)!bVar11 * auVar436._12_4_;
          auVar442 = vfmadd213ps_avx512vl(auVar1324,auVar444,auVar1380);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar444,auVar1434);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar444,auVar1488);
          uVar426 = vcmpps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,auVar496,2);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar444,auVar1542);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar444,auVar1596);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar444,auVar1650);
          auVar436 = vmulps_avx512vl(auVar444,auVar444);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar444,auVar1704);
          auVar442 = vfmadd213ps_avx512vl(auVar442,auVar444,auVar1757);
          auVar437 = vmulps_avx512vl(auVar436,auVar444);
          auVar442 = vmulps_avx512vl(auVar437,auVar442);
          auVar443 = vpaddd_avx512vl(auVar443,auVar1089);
          auVar443 = vcvtdq2ps_avx512vl(auVar443);
          auVar437 = vsubps_avx512vl(auVar443,auVar1261);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar445._0_4_ = (uint)bVar11 * auVar437._0_4_ | (uint)!bVar11 * auVar443._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar445._4_4_ = (uint)bVar11 * auVar437._4_4_ | (uint)!bVar11 * auVar443._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar445._8_4_ = (uint)bVar11 * auVar437._8_4_ | (uint)!bVar11 * auVar443._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar445._12_4_ = (uint)bVar11 * auVar437._12_4_ | (uint)!bVar11 * auVar443._12_4_;
          auVar442 = vfmadd231ps_avx512vl(auVar442,auVar445,auVar493);
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar516,auVar436);
          auVar442 = vsubps_avx(auVar442,auVar444);
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar504,auVar445);
          bVar11 = (bool)((byte)uVar426 & 1);
          bVar12 = (bool)((byte)(uVar426 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar426 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar920._0_4_ =
               (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar442._0_4_) *
               *(float *)*(undefined1 (*) [64])ptr;
          auVar920._4_4_ =
               (float)((uint)bVar12 * auVar462._4_4_ | (uint)!bVar12 * auVar442._4_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar920._8_4_ =
               (float)((uint)bVar13 * auVar462._8_4_ | (uint)!bVar13 * auVar442._8_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar920._12_4_ =
               (float)((uint)bVar14 * auVar462._12_4_ | (uint)!bVar14 * auVar442._12_4_) *
               *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar442 = vminps_avx512vl(auVar920,auVar492);
          auVar442 = vmaxps_avx512vl(auVar442,auVar497);
          auVar443 = vfmadd231ps_avx512vl(auVar516,auVar442,auVar498);
          auVar436 = vcvttps2dq_avx512vl(auVar443);
          auVar436 = vcvtdq2ps_avx512vl(auVar436);
          uVar46 = vcmpps_avx512vl(auVar443,auVar436,1);
          auVar443 = vsubps_avx512vl(auVar436,auVar1261);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar446._0_4_ = (uint)bVar11 * auVar443._0_4_ | (uint)!bVar11 * auVar436._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar446._4_4_ = (uint)bVar11 * auVar443._4_4_ | (uint)!bVar11 * auVar436._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar446._8_4_ = (uint)bVar11 * auVar443._8_4_ | (uint)!bVar11 * auVar436._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar446._12_4_ = (uint)bVar11 * auVar443._12_4_ | (uint)!bVar11 * auVar436._12_4_;
          auVar442 = vfmsub231ps_avx512vl(auVar442,auVar446,auVar504);
          auVar442 = vfnmsub231ps_avx512vl(auVar442,auVar446,auVar493);
          auVar443 = vfmadd213ps_avx512vl(auVar501,auVar442,auVar502);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar520);
          auVar436 = vmulps_avx512vl(auVar442,auVar442);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar439);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar440);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar442,auVar516);
          auVar442 = vfmadd213ps_avx512vl(auVar443,auVar436,auVar442);
          auVar443 = vcvttps2dq_avx512vl(auVar446);
          auVar443 = vpslld_avx(auVar443,0x17);
          auVar443 = vpaddd_avx512vl(auVar443,auVar441);
          auVar442 = vfmadd213ps_fma(auVar443,auVar442,auVar443);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar442;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar422 = uVar872 + 4;
          iVar421 = uVar872 + 7;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        return;
      }
      lVar425 = 0;
      do {
        auVar559._0_4_ =
             powf(*(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4),
                  *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4));
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar559._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003a0a9f;
      auVar559._0_4_ = *ptr;
      if (iVar421 == 4) {
        _local_78 = *(undefined1 (*) [16])ptr;
        auVar730 = ZEXT3264(CONCAT1616(_local_78,_local_78));
      }
      else {
        local_78._4_4_ = auVar559._0_4_;
        local_78._0_4_ = auVar559._0_4_;
        fStack_70 = auVar559._0_4_;
        fStack_6c = auVar559._0_4_;
        if (iVar421 == 8) {
          auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          auVar730 = ZEXT3264(CONCAT428(auVar559._0_4_,
                                        CONCAT424(auVar559._0_4_,
                                                  CONCAT420(auVar559._0_4_,
                                                            CONCAT416(auVar559._0_4_,
                                                                      CONCAT412(auVar559._0_4_,
                                                                                CONCAT48(auVar559.
                                                  _0_4_,CONCAT44(auVar559._0_4_,auVar559._0_4_))))))
                                       ));
          if (iVar421 == 0x10) {
            auVar730 = vmovdqu64_avx512f(auVar730);
            local_68 = auVar730._0_28_;
            auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_003abf6b;
          }
        }
      }
      auVar712 = vmovdqu64_avx512f(auVar730);
      local_68 = auVar712._0_28_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar730._0_32_,1);
LAB_003abf6b:
      uVar422 = 0;
      auVar462 = ZEXT416((uint)auVar559._0_4_);
      if (0xf < (int)uVar424) {
        auVar712 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
        auVar713 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
        auVar714 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar715 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q1);
        auVar716 = vpxord_avx512f(auVar712,auVar714);
        auVar717 = vmovdqa64_avx512f((undefined1  [64])_ps512_cephes_log_q2);
        auVar492 = auVar717._0_16_;
        auVar718 = vpxord_avx512f(auVar717,auVar714);
        auVar719 = vpxord_avx512f(auVar715,auVar714);
        iVar421 = 0xf;
        auVar462 = vxorps_avx512vl(auVar498,auVar498);
        auVar714 = vpternlogd_avx512f(auVar714,auVar714,auVar714,0xff);
        do {
          auVar720 = vmaxps_avx512f(*(undefined1 (*) [64])ptr1,(undefined1  [64])_ps512_min_norm_pos
                                   );
          auVar721 = vpsrld_avx512f(auVar720,0x17);
          auVar720 = vpternlogd_avx512f(auVar720,auVar712,(undefined1  [64])_ps512_inv_mant_mask,
                                        0xec);
          uVar46 = vcmpps_avx512f(auVar720,(undefined1  [64])_ps512_cephes_SQRTHF,1);
          auVar722 = vsubps_avx512f(auVar720,(undefined1  [64])afVar404);
          auVar720 = vaddps_avx512f(auVar722,auVar720);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar862._0_4_ = (uint)bVar11 * auVar720._0_4_ | (uint)!bVar11 * auVar722._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar862._4_4_ = (uint)bVar11 * auVar720._4_4_ | (uint)!bVar11 * auVar722._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar862._8_4_ = (uint)bVar11 * auVar720._8_4_ | (uint)!bVar11 * auVar722._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar862._12_4_ = (uint)bVar11 * auVar720._12_4_ | (uint)!bVar11 * auVar722._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar862._16_4_ = (uint)bVar11 * auVar720._16_4_ | (uint)!bVar11 * auVar722._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar862._20_4_ = (uint)bVar11 * auVar720._20_4_ | (uint)!bVar11 * auVar722._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar862._24_4_ = (uint)bVar11 * auVar720._24_4_ | (uint)!bVar11 * auVar722._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar862._28_4_ = (uint)bVar11 * auVar720._28_4_ | (uint)!bVar11 * auVar722._28_4_;
          bVar28 = (byte)(uVar46 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar862._32_4_ = (uint)bVar11 * auVar720._32_4_ | (uint)!bVar11 * auVar722._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar862._36_4_ = (uint)bVar11 * auVar720._36_4_ | (uint)!bVar11 * auVar722._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar862._40_4_ = (uint)bVar11 * auVar720._40_4_ | (uint)!bVar11 * auVar722._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar862._44_4_ = (uint)bVar11 * auVar720._44_4_ | (uint)!bVar11 * auVar722._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar862._48_4_ = (uint)bVar11 * auVar720._48_4_ | (uint)!bVar11 * auVar722._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar862._52_4_ = (uint)bVar11 * auVar720._52_4_ | (uint)!bVar11 * auVar722._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar862._56_4_ = (uint)bVar11 * auVar720._56_4_ | (uint)!bVar11 * auVar722._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar862._60_4_ = (uint)bVar11 * auVar720._60_4_ | (uint)!bVar11 * auVar722._60_4_;
          auVar720 = vfmadd132ps_avx512f(auVar862,(undefined1  [64])_ps512_cephes_log_p1,
                                         (undefined1  [64])_ps512_cephes_log_p0);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar862,(undefined1  [64])afVar414);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar862,(undefined1  [64])afVar415);
          auVar722 = vmulps_avx512f(auVar862,auVar862);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar862,(undefined1  [64])afVar416);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar862,(undefined1  [64])afVar417);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar862,(undefined1  [64])afVar418);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar862,(undefined1  [64])afVar419);
          auVar720 = vfmadd213ps_avx512f(auVar720,auVar862,(undefined1  [64])afVar420);
          auVar723 = vmulps_avx512f(auVar722,auVar862);
          auVar720 = vfmadd213ps_avx512f(auVar723,auVar720,auVar862);
          auVar721 = vpsubd_avx512f(auVar721,auVar713);
          auVar721 = vcvtdq2ps_avx512f(auVar721);
          auVar723 = vaddps_avx512f(auVar721,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar863._0_4_ = (uint)bVar11 * auVar721._0_4_ | (uint)!bVar11 * auVar723._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar863._4_4_ = (uint)bVar11 * auVar721._4_4_ | (uint)!bVar11 * auVar723._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar863._8_4_ = (uint)bVar11 * auVar721._8_4_ | (uint)!bVar11 * auVar723._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar863._12_4_ = (uint)bVar11 * auVar721._12_4_ | (uint)!bVar11 * auVar723._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar863._16_4_ = (uint)bVar11 * auVar721._16_4_ | (uint)!bVar11 * auVar723._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar863._20_4_ = (uint)bVar11 * auVar721._20_4_ | (uint)!bVar11 * auVar723._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar863._24_4_ = (uint)bVar11 * auVar721._24_4_ | (uint)!bVar11 * auVar723._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar863._28_4_ = (uint)bVar11 * auVar721._28_4_ | (uint)!bVar11 * auVar723._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar863._32_4_ = (uint)bVar11 * auVar721._32_4_ | (uint)!bVar11 * auVar723._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar863._36_4_ = (uint)bVar11 * auVar721._36_4_ | (uint)!bVar11 * auVar723._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar863._40_4_ = (uint)bVar11 * auVar721._40_4_ | (uint)!bVar11 * auVar723._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar863._44_4_ = (uint)bVar11 * auVar721._44_4_ | (uint)!bVar11 * auVar723._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar863._48_4_ = (uint)bVar11 * auVar721._48_4_ | (uint)!bVar11 * auVar723._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar863._52_4_ = (uint)bVar11 * auVar721._52_4_ | (uint)!bVar11 * auVar723._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar863._56_4_ = (uint)bVar11 * auVar721._56_4_ | (uint)!bVar11 * auVar723._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar863._60_4_ = (uint)bVar11 * auVar721._60_4_ | (uint)!bVar11 * auVar723._60_4_;
          uVar46 = vcmpps_avx512f(*(undefined1 (*) [64])ptr1,ZEXT1664(auVar462),2);
          auVar720 = vfmadd231ps_avx512f(auVar720,auVar863,auVar715);
          auVar720 = vfmadd231ps_avx512f(auVar720,auVar716,auVar722);
          auVar720 = vfmadd231ps_avx512f(auVar720,auVar717,auVar863);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar864._0_4_ = (uint)bVar11 * auVar714._0_4_ | (uint)!bVar11 * auVar720._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar864._4_4_ = (uint)bVar11 * auVar714._4_4_ | (uint)!bVar11 * auVar720._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar864._8_4_ = (uint)bVar11 * auVar714._8_4_ | (uint)!bVar11 * auVar720._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar864._12_4_ = (uint)bVar11 * auVar714._12_4_ | (uint)!bVar11 * auVar720._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar864._16_4_ = (uint)bVar11 * auVar714._16_4_ | (uint)!bVar11 * auVar720._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar864._20_4_ = (uint)bVar11 * auVar714._20_4_ | (uint)!bVar11 * auVar720._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar864._24_4_ = (uint)bVar11 * auVar714._24_4_ | (uint)!bVar11 * auVar720._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar864._28_4_ = (uint)bVar11 * auVar714._28_4_ | (uint)!bVar11 * auVar720._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar864._32_4_ = (uint)bVar11 * auVar714._32_4_ | (uint)!bVar11 * auVar720._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar864._36_4_ = (uint)bVar11 * auVar714._36_4_ | (uint)!bVar11 * auVar720._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar864._40_4_ = (uint)bVar11 * auVar714._40_4_ | (uint)!bVar11 * auVar720._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar864._44_4_ = (uint)bVar11 * auVar714._44_4_ | (uint)!bVar11 * auVar720._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar864._48_4_ = (uint)bVar11 * auVar714._48_4_ | (uint)!bVar11 * auVar720._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar864._52_4_ = (uint)bVar11 * auVar714._52_4_ | (uint)!bVar11 * auVar720._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar864._56_4_ = (uint)bVar11 * auVar714._56_4_ | (uint)!bVar11 * auVar720._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar864._60_4_ = (uint)bVar11 * auVar714._60_4_ | (uint)!bVar11 * auVar720._60_4_;
          auVar720 = vmulps_avx512f(auVar864,auVar730);
          auVar720 = vminps_avx512f(auVar720,(undefined1  [64])afVar405);
          auVar720 = vmaxps_avx512f(auVar720,(undefined1  [64])afVar406);
          auVar721 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar720,auVar712);
          auVar722 = vrndscaleps_avx512f(auVar721,1);
          uVar46 = vcmpps_avx512f(auVar721,auVar722,1);
          auVar721 = vsubps_avx512f(auVar722,(undefined1  [64])afVar404);
          bVar11 = (bool)((byte)uVar46 & 1);
          in_ZMM5._0_4_ = (uint)bVar11 * auVar721._0_4_ | (uint)!bVar11 * auVar722._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          in_ZMM5._4_4_ = (uint)bVar11 * auVar721._4_4_ | (uint)!bVar11 * auVar722._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          in_ZMM5._8_4_ = (uint)bVar11 * auVar721._8_4_ | (uint)!bVar11 * auVar722._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          in_ZMM5._12_4_ = (uint)bVar11 * auVar721._12_4_ | (uint)!bVar11 * auVar722._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          in_ZMM5._16_4_ = (uint)bVar11 * auVar721._16_4_ | (uint)!bVar11 * auVar722._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          in_ZMM5._20_4_ = (uint)bVar11 * auVar721._20_4_ | (uint)!bVar11 * auVar722._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          in_ZMM5._24_4_ = (uint)bVar11 * auVar721._24_4_ | (uint)!bVar11 * auVar722._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          in_ZMM5._28_4_ = (uint)bVar11 * auVar721._28_4_ | (uint)!bVar11 * auVar722._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          in_ZMM5._32_4_ = (uint)bVar11 * auVar721._32_4_ | (uint)!bVar11 * auVar722._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          in_ZMM5._36_4_ = (uint)bVar11 * auVar721._36_4_ | (uint)!bVar11 * auVar722._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          in_ZMM5._40_4_ = (uint)bVar11 * auVar721._40_4_ | (uint)!bVar11 * auVar722._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          in_ZMM5._44_4_ = (uint)bVar11 * auVar721._44_4_ | (uint)!bVar11 * auVar722._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          in_ZMM5._48_4_ = (uint)bVar11 * auVar721._48_4_ | (uint)!bVar11 * auVar722._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          in_ZMM5._52_4_ = (uint)bVar11 * auVar721._52_4_ | (uint)!bVar11 * auVar722._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          in_ZMM5._56_4_ = (uint)bVar11 * auVar721._56_4_ | (uint)!bVar11 * auVar722._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          in_ZMM5._60_4_ = (uint)bVar11 * auVar721._60_4_ | (uint)!bVar11 * auVar722._60_4_;
          auVar720 = vfmadd231ps_avx512f(auVar720,in_ZMM5,auVar718);
          auVar720 = vfmadd231ps_avx512f(auVar720,in_ZMM5,auVar719);
          auVar721 = vfmadd213ps_avx512f(auVar720,(undefined1  [64])afVar408,
                                         (undefined1  [64])afVar409);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,(undefined1  [64])afVar410);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,(undefined1  [64])afVar411);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,(undefined1  [64])afVar412);
          auVar722 = vmulps_avx512f(auVar720,auVar720);
          auVar721 = vfmadd213ps_avx512f(auVar721,auVar720,auVar712);
          auVar720 = vfmadd213ps_avx512f(auVar721,auVar722,auVar720);
          auVar721 = vcvttps2dq_avx512f(in_ZMM5);
          in_ZMM4 = vaddps_avx512f(auVar720,(undefined1  [64])afVar404);
          auVar720 = vpaddd_avx512f(auVar721,auVar713);
          auVar720 = vpslld_avx512f(auVar720,0x17);
          auVar720 = vmulps_avx512f(in_ZMM4,auVar720);
          *(undefined1 (*) [64])outptr = auVar720;
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
        auVar462 = auVar516;
      }
      if ((int)(uVar422 | 7) < (int)uVar424) {
        auVar1375._8_4_ = 0xbf800000;
        auVar1375._0_8_ = 0xbf800000bf800000;
        auVar1375._12_4_ = 0xbf800000;
        auVar1375._16_4_ = 0xbf800000;
        auVar1375._20_4_ = 0xbf800000;
        auVar1375._24_4_ = 0xbf800000;
        auVar1375._28_4_ = 0xbf800000;
        auVar1431._8_4_ = 0x3f800000;
        auVar1431._0_8_ = 0x3f8000003f800000;
        auVar1431._12_4_ = 0x3f800000;
        auVar1431._16_4_ = 0x3f800000;
        auVar1431._20_4_ = 0x3f800000;
        auVar1431._24_4_ = 0x3f800000;
        auVar1431._28_4_ = 0x3f800000;
        auVar1485._8_4_ = 0x3d9021bb;
        auVar1485._0_8_ = 0x3d9021bb3d9021bb;
        auVar1485._12_4_ = 0x3d9021bb;
        auVar1485._16_4_ = 0x3d9021bb;
        auVar1485._20_4_ = 0x3d9021bb;
        auVar1485._24_4_ = 0x3d9021bb;
        auVar1485._28_4_ = 0x3d9021bb;
        auVar1539._8_4_ = 0xbdebd1b8;
        auVar1539._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1539._12_4_ = 0xbdebd1b8;
        auVar1539._16_4_ = 0xbdebd1b8;
        auVar1539._20_4_ = 0xbdebd1b8;
        auVar1539._24_4_ = 0xbdebd1b8;
        auVar1539._28_4_ = 0xbdebd1b8;
        auVar1593._8_4_ = 0x3def251a;
        auVar1593._0_8_ = 0x3def251a3def251a;
        auVar1593._12_4_ = 0x3def251a;
        auVar1593._16_4_ = 0x3def251a;
        auVar1593._20_4_ = 0x3def251a;
        auVar1593._24_4_ = 0x3def251a;
        auVar1593._28_4_ = 0x3def251a;
        auVar1647._8_4_ = 0xbdfe5d4f;
        auVar1647._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1647._12_4_ = 0xbdfe5d4f;
        auVar1647._16_4_ = 0xbdfe5d4f;
        auVar1647._20_4_ = 0xbdfe5d4f;
        auVar1647._24_4_ = 0xbdfe5d4f;
        auVar1647._28_4_ = 0xbdfe5d4f;
        auVar1701._8_4_ = 0x3e11e9bf;
        auVar1701._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1701._12_4_ = 0x3e11e9bf;
        auVar1701._16_4_ = 0x3e11e9bf;
        auVar1701._20_4_ = 0x3e11e9bf;
        auVar1701._24_4_ = 0x3e11e9bf;
        auVar1701._28_4_ = 0x3e11e9bf;
        auVar1752._8_4_ = 0xbe2aae50;
        auVar1752._0_8_ = 0xbe2aae50be2aae50;
        auVar1752._12_4_ = 0xbe2aae50;
        auVar1752._16_4_ = 0xbe2aae50;
        auVar1752._20_4_ = 0xbe2aae50;
        auVar1752._24_4_ = 0xbe2aae50;
        auVar1752._28_4_ = 0xbe2aae50;
        auVar1801._8_4_ = 0x3e4cceac;
        auVar1801._0_8_ = 0x3e4cceac3e4cceac;
        auVar1801._12_4_ = 0x3e4cceac;
        auVar1801._16_4_ = 0x3e4cceac;
        auVar1801._20_4_ = 0x3e4cceac;
        auVar1801._24_4_ = 0x3e4cceac;
        auVar1801._28_4_ = 0x3e4cceac;
        auVar672 = vbroadcastss_avx512vl(ZEXT416(0xbe7ffffc));
        auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar684 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar676 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar677 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar492 = auVar677._0_16_;
        auVar462 = ZEXT816(0) << 0x40;
        auVar671 = vpcmpeqd_avx2(auVar730._0_32_,auVar730._0_32_);
        auVar680 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar681 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar682 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar562 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar563 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar564 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar565 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar566 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar567 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar872 = uVar422;
        do {
          auVar220._8_4_ = 0x800000;
          auVar220._0_8_ = 0x80000000800000;
          auVar220._12_4_ = 0x800000;
          auVar220._16_4_ = 0x800000;
          auVar220._20_4_ = 0x800000;
          auVar220._24_4_ = 0x800000;
          auVar220._28_4_ = 0x800000;
          auVar560 = vmaxps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,auVar220);
          auVar553 = vpsrld_avx512vl(auVar560,0x17);
          auVar1135._8_4_ = 0x807fffff;
          auVar1135._0_8_ = 0x807fffff807fffff;
          auVar1135._12_4_ = 0x807fffff;
          auVar1135._16_4_ = 0x807fffff;
          auVar1135._20_4_ = 0x807fffff;
          auVar1135._24_4_ = 0x807fffff;
          auVar1135._28_4_ = 0x807fffff;
          auVar221._8_4_ = 0x3f000000;
          auVar221._0_8_ = 0x3f0000003f000000;
          auVar221._12_4_ = 0x3f000000;
          auVar221._16_4_ = 0x3f000000;
          auVar221._20_4_ = 0x3f000000;
          auVar221._24_4_ = 0x3f000000;
          auVar221._28_4_ = 0x3f000000;
          auVar560 = vpternlogd_avx512vl(auVar560,auVar1135,auVar221,0xea);
          auVar222._8_4_ = 0x3f3504f3;
          auVar222._0_8_ = 0x3f3504f33f3504f3;
          auVar222._12_4_ = 0x3f3504f3;
          auVar222._16_4_ = 0x3f3504f3;
          auVar222._20_4_ = 0x3f3504f3;
          auVar222._24_4_ = 0x3f3504f3;
          auVar222._28_4_ = 0x3f3504f3;
          uVar46 = vcmpps_avx512vl(auVar560,auVar222,1);
          auVar556 = vaddps_avx512vl(auVar560,auVar1375);
          auVar560 = vaddps_avx512vl(auVar556,auVar560);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar701._0_4_ = (float)((uint)bVar11 * auVar560._0_4_ | (uint)!bVar11 * auVar556._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar701._4_4_ = (float)((uint)bVar11 * auVar560._4_4_ | (uint)!bVar11 * auVar556._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar701._8_4_ = (float)((uint)bVar11 * auVar560._8_4_ | (uint)!bVar11 * auVar556._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar701._12_4_ =
               (float)((uint)bVar11 * auVar560._12_4_ | (uint)!bVar11 * auVar556._12_4_);
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar701._16_4_ =
               (float)((uint)bVar11 * auVar560._16_4_ | (uint)!bVar11 * auVar556._16_4_);
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar701._20_4_ =
               (float)((uint)bVar11 * auVar560._20_4_ | (uint)!bVar11 * auVar556._20_4_);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar701._24_4_ =
               (float)((uint)bVar11 * auVar560._24_4_ | (uint)!bVar11 * auVar556._24_4_);
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar701._28_4_ = (uint)bVar11 * auVar560._28_4_ | (uint)!bVar11 * auVar556._28_4_;
          auVar560 = vfmadd213ps_avx512vl(auVar1485,auVar701,auVar1539);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar701,auVar1593);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar701,auVar1647);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar701,auVar1701);
          auVar1196._0_4_ = auVar701._0_4_ * auVar701._0_4_;
          auVar1196._4_4_ = auVar701._4_4_ * auVar701._4_4_;
          auVar1196._8_4_ = auVar701._8_4_ * auVar701._8_4_;
          auVar1196._12_4_ = auVar701._12_4_ * auVar701._12_4_;
          auVar1196._16_4_ = auVar701._16_4_ * auVar701._16_4_;
          auVar1196._20_4_ = auVar701._20_4_ * auVar701._20_4_;
          auVar1196._28_36_ = in_ZMM4._28_36_;
          auVar1196._24_4_ = auVar701._24_4_ * auVar701._24_4_;
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar701,auVar1752);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar701,auVar1801);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar701,auVar672);
          auVar560 = vfmadd213ps_avx512vl(auVar560,auVar701,auVar675);
          auVar1260._0_4_ = auVar1196._0_4_ * auVar701._0_4_;
          auVar1260._4_4_ = auVar1196._4_4_ * auVar701._4_4_;
          auVar1260._8_4_ = auVar1196._8_4_ * auVar701._8_4_;
          auVar1260._12_4_ = auVar1196._12_4_ * auVar701._12_4_;
          auVar1260._16_4_ = auVar1196._16_4_ * auVar701._16_4_;
          auVar1260._20_4_ = auVar1196._20_4_ * auVar701._20_4_;
          auVar1260._28_36_ = in_ZMM5._28_36_;
          auVar1260._24_4_ = auVar1196._24_4_ * auVar701._24_4_;
          auVar560 = vmulps_avx512vl(auVar1260._0_32_,auVar560);
          auVar223._8_4_ = 0xffffff82;
          auVar223._0_8_ = 0xffffff82ffffff82;
          auVar223._12_4_ = 0xffffff82;
          auVar223._16_4_ = 0xffffff82;
          auVar223._20_4_ = 0xffffff82;
          auVar223._24_4_ = 0xffffff82;
          auVar223._28_4_ = 0xffffff82;
          auVar553 = vpaddd_avx512vl(auVar553,auVar223);
          auVar553 = vcvtdq2ps_avx512vl(auVar553);
          auVar556 = vsubps_avx512vl(auVar553,auVar1431);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar702._0_4_ = (uint)bVar11 * auVar556._0_4_ | (uint)!bVar11 * auVar553._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar702._4_4_ = (uint)bVar11 * auVar556._4_4_ | (uint)!bVar11 * auVar553._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar702._8_4_ = (uint)bVar11 * auVar556._8_4_ | (uint)!bVar11 * auVar553._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar702._12_4_ = (uint)bVar11 * auVar556._12_4_ | (uint)!bVar11 * auVar553._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar702._16_4_ = (uint)bVar11 * auVar556._16_4_ | (uint)!bVar11 * auVar553._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar702._20_4_ = (uint)bVar11 * auVar556._20_4_ | (uint)!bVar11 * auVar553._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar702._24_4_ = (uint)bVar11 * auVar556._24_4_ | (uint)!bVar11 * auVar553._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar702._28_4_ = (uint)bVar11 * auVar556._28_4_ | (uint)!bVar11 * auVar553._28_4_;
          auVar560 = vfmadd231ps_avx512vl(auVar560,auVar702,auVar684);
          auVar553 = vfmsub231ps_avx512vl(auVar560,auVar676,auVar1196._0_32_);
          uVar46 = vcmpps_avx512vl(*(undefined1 (*) [32])*(undefined1 (*) [64])ptr1,
                                   ZEXT1632(auVar462),2);
          auVar560 = vsubps_avx(auVar553,auVar701);
          auVar560 = vfmsub231ps_avx512vl(auVar560,auVar677,auVar702);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
          bVar18 = SUB81(uVar46 >> 7,0);
          auVar391._4_4_ =
               (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar560._4_4_) *
               local_68._4_4_;
          auVar391._0_4_ =
               (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar560._0_4_) *
               local_68._0_4_;
          auVar391._8_4_ =
               (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar560._8_4_) *
               local_68._8_4_;
          auVar391._12_4_ =
               (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar560._12_4_) *
               local_68._12_4_;
          auVar391._16_4_ =
               (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar560._16_4_) *
               local_68._16_4_;
          auVar391._20_4_ =
               (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar560._20_4_) *
               local_68._20_4_;
          auVar391._24_4_ =
               (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar560._24_4_) *
               local_68._24_4_;
          auVar391._28_4_ = (uint)bVar18 * auVar671._28_4_ | (uint)!bVar18 * auVar560._28_4_;
          auVar560 = vminps_avx512vl(auVar391,auVar680);
          auVar556 = vmaxps_avx512vl(auVar560,auVar681);
          auVar552 = vfmadd231ps_avx512vl(auVar676,auVar556,auVar682);
          auVar560 = vroundps_avx(auVar552,1);
          uVar46 = vcmpps_avx512vl(auVar552,auVar560,1);
          auVar552 = vsubps_avx512vl(auVar560,auVar1431);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar703._0_4_ = (float)((uint)bVar11 * auVar552._0_4_ | (uint)!bVar11 * auVar560._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar703._4_4_ = (float)((uint)bVar11 * auVar552._4_4_ | (uint)!bVar11 * auVar560._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar703._8_4_ = (float)((uint)bVar11 * auVar552._8_4_ | (uint)!bVar11 * auVar560._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar703._12_4_ =
               (float)((uint)bVar11 * auVar552._12_4_ | (uint)!bVar11 * auVar560._12_4_);
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar703._16_4_ =
               (float)((uint)bVar11 * auVar552._16_4_ | (uint)!bVar11 * auVar560._16_4_);
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar703._20_4_ =
               (float)((uint)bVar11 * auVar552._20_4_ | (uint)!bVar11 * auVar560._20_4_);
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar703._24_4_ =
               (float)((uint)bVar11 * auVar552._24_4_ | (uint)!bVar11 * auVar560._24_4_);
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar703._28_4_ =
               (float)((uint)bVar11 * auVar552._28_4_ | (uint)!bVar11 * auVar560._28_4_);
          in_ZMM4 = ZEXT3264(auVar703);
          auVar560 = vfmsub231ps_avx512vl(auVar556,auVar703,auVar677);
          auVar560 = vfnmsub231ps_avx512vl(auVar560,auVar703,auVar684);
          auVar556 = vfmadd213ps_avx512vl(auVar562,auVar560,auVar563);
          auVar392._4_4_ = auVar560._4_4_ * auVar560._4_4_;
          auVar392._0_4_ = auVar560._0_4_ * auVar560._0_4_;
          auVar392._8_4_ = auVar560._8_4_ * auVar560._8_4_;
          auVar392._12_4_ = auVar560._12_4_ * auVar560._12_4_;
          auVar392._16_4_ = auVar560._16_4_ * auVar560._16_4_;
          auVar392._20_4_ = auVar560._20_4_ * auVar560._20_4_;
          auVar392._24_4_ = auVar560._24_4_ * auVar560._24_4_;
          auVar392._28_4_ = auVar553._28_4_;
          in_ZMM5 = ZEXT3264(auVar392);
          auVar553 = vfmadd213ps_avx512vl(auVar556,auVar560,auVar564);
          auVar553 = vfmadd213ps_avx512vl(auVar553,auVar560,auVar565);
          auVar553 = vfmadd213ps_avx512vl(auVar553,auVar560,auVar566);
          auVar553 = vfmadd213ps_avx512vl(auVar553,auVar560,auVar676);
          auVar493 = vfmadd213ps_fma(auVar553,auVar392,auVar560);
          auVar1008._0_4_ = (int)auVar703._0_4_;
          auVar1008._4_4_ = (int)auVar703._4_4_;
          auVar1008._8_4_ = (int)auVar703._8_4_;
          auVar1008._12_4_ = (int)auVar703._12_4_;
          auVar1008._16_4_ = (int)auVar703._16_4_;
          auVar1008._20_4_ = (int)auVar703._20_4_;
          auVar1008._24_4_ = (int)auVar703._24_4_;
          auVar1008._28_4_ = (int)auVar703._28_4_;
          auVar560 = vpslld_avx2(auVar1008,0x17);
          auVar560 = vpaddd_avx512vl(auVar560,auVar567);
          auVar493 = vfmadd213ps_fma(auVar560,ZEXT1632(auVar493),auVar560);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = ZEXT1632(auVar493);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar422 = uVar872 + 8;
          iVar421 = uVar872 + 0xf;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if ((int)(uVar422 | 3) < (int)uVar424) {
        auVar1279._8_4_ = 0xbf800000;
        auVar1279._0_8_ = 0xbf800000bf800000;
        auVar1279._12_4_ = 0xbf800000;
        auVar1340._8_4_ = 0x3f800000;
        auVar1340._0_8_ = 0x3f8000003f800000;
        auVar1340._12_4_ = 0x3f800000;
        auVar1396._8_4_ = 0x3d9021bb;
        auVar1396._0_8_ = 0x3d9021bb3d9021bb;
        auVar1396._12_4_ = 0x3d9021bb;
        auVar1450._8_4_ = 0xbdebd1b8;
        auVar1450._0_8_ = 0xbdebd1b8bdebd1b8;
        auVar1450._12_4_ = 0xbdebd1b8;
        auVar1504._8_4_ = 0x3def251a;
        auVar1504._0_8_ = 0x3def251a3def251a;
        auVar1504._12_4_ = 0x3def251a;
        auVar1558._8_4_ = 0xbdfe5d4f;
        auVar1558._0_8_ = 0xbdfe5d4fbdfe5d4f;
        auVar1558._12_4_ = 0xbdfe5d4f;
        auVar1612._8_4_ = 0x3e11e9bf;
        auVar1612._0_8_ = 0x3e11e9bf3e11e9bf;
        auVar1612._12_4_ = 0x3e11e9bf;
        auVar1666._8_4_ = 0xbe2aae50;
        auVar1666._0_8_ = 0xbe2aae50be2aae50;
        auVar1666._12_4_ = 0xbe2aae50;
        auVar1720._8_4_ = 0x3e4cceac;
        auVar1720._0_8_ = 0x3e4cceac3e4cceac;
        auVar1720._12_4_ = 0x3e4cceac;
        auVar1772._8_4_ = 0xbe7ffffc;
        auVar1772._0_8_ = 0xbe7ffffcbe7ffffc;
        auVar1772._12_4_ = 0xbe7ffffc;
        auVar493 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaaa));
        auVar516 = vbroadcastss_avx512vl(ZEXT416(0xb95e8083));
        auVar504 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar496 = vbroadcastss_avx512vl(ZEXT416(0x3f318000));
        auVar492 = vxorps_avx512vl(auVar492,auVar492);
        auVar462 = vpcmpeqd_avx(auVar462,auVar462);
        auVar497 = vbroadcastss_avx512vl(ZEXT416(0x42b0c0a5));
        auVar498 = vbroadcastss_avx512vl(ZEXT416(0xc2b0c0a5));
        auVar501 = vbroadcastss_avx512vl(ZEXT416(0x3fb8aa3b));
        auVar502 = vbroadcastss_avx512vl(ZEXT416(0x39506967));
        auVar520 = vbroadcastss_avx512vl(ZEXT416(0x3ab743ce));
        auVar439 = vbroadcastss_avx512vl(ZEXT416(0x3c088908));
        auVar440 = vbroadcastss_avx512vl(ZEXT416(0x3d2aa9c1));
        auVar441 = vbroadcastss_avx512vl(ZEXT416(0x3e2aaaaa));
        auVar442 = vpbroadcastd_avx512vl(ZEXT416(0x3f800000));
        uVar872 = uVar422;
        do {
          auVar90._8_4_ = 0x800000;
          auVar90._0_8_ = 0x80000000800000;
          auVar90._12_4_ = 0x800000;
          auVar443 = vmaxps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,auVar90);
          auVar436 = vpsrld_avx512vl(auVar443,0x17);
          auVar1031._8_4_ = 0x807fffff;
          auVar1031._0_8_ = 0x807fffff807fffff;
          auVar1031._12_4_ = 0x807fffff;
          auVar91._8_4_ = 0x3f000000;
          auVar91._0_8_ = 0x3f0000003f000000;
          auVar91._12_4_ = 0x3f000000;
          auVar443 = vpternlogd_avx512vl(auVar443,auVar1031,auVar91,0xea);
          auVar92._8_4_ = 0x3f3504f3;
          auVar92._0_8_ = 0x3f3504f33f3504f3;
          auVar92._12_4_ = 0x3f3504f3;
          uVar46 = vcmpps_avx512vl(auVar443,auVar92,1);
          auVar437 = vaddps_avx512vl(auVar443,auVar1279);
          auVar443 = vaddps_avx512vl(auVar437,auVar443);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar523._0_4_ = (float)((uint)bVar11 * auVar443._0_4_ | (uint)!bVar11 * auVar437._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar523._4_4_ = (float)((uint)bVar11 * auVar443._4_4_ | (uint)!bVar11 * auVar437._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar523._8_4_ = (float)((uint)bVar11 * auVar443._8_4_ | (uint)!bVar11 * auVar437._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar523._12_4_ =
               (float)((uint)bVar11 * auVar443._12_4_ | (uint)!bVar11 * auVar437._12_4_);
          auVar443 = vfmadd213ps_avx512vl(auVar1396,auVar523,auVar1450);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar523,auVar1504);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar523,auVar1558);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar523,auVar1612);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar523,auVar1666);
          auVar1106._0_4_ = auVar523._0_4_ * auVar523._0_4_;
          auVar1106._4_4_ = auVar523._4_4_ * auVar523._4_4_;
          auVar1106._8_4_ = auVar523._8_4_ * auVar523._8_4_;
          auVar1106._12_4_ = auVar523._12_4_ * auVar523._12_4_;
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar523,auVar1720);
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar523,auVar1772);
          auVar1162._0_4_ = auVar1106._0_4_ * auVar523._0_4_;
          auVar1162._4_4_ = auVar1106._4_4_ * auVar523._4_4_;
          auVar1162._8_4_ = auVar1106._8_4_ * auVar523._8_4_;
          auVar1162._12_4_ = auVar1106._12_4_ * auVar523._12_4_;
          auVar443 = vfmadd213ps_avx512vl(auVar443,auVar523,auVar493);
          auVar437 = vmulps_avx512vl(auVar1162,auVar443);
          auVar93._8_4_ = 0xffffff82;
          auVar93._0_8_ = 0xffffff82ffffff82;
          auVar93._12_4_ = 0xffffff82;
          auVar443 = vpaddd_avx512vl(auVar436,auVar93);
          auVar443 = vcvtdq2ps_avx(auVar443);
          auVar436 = vsubps_avx512vl(auVar443,auVar1340);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar524._0_4_ = (uint)bVar11 * auVar436._0_4_ | (uint)!bVar11 * auVar443._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar524._4_4_ = (uint)bVar11 * auVar436._4_4_ | (uint)!bVar11 * auVar443._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar524._8_4_ = (uint)bVar11 * auVar436._8_4_ | (uint)!bVar11 * auVar443._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar524._12_4_ = (uint)bVar11 * auVar436._12_4_ | (uint)!bVar11 * auVar443._12_4_;
          auVar443 = vfmadd231ps_avx512vl(auVar437,auVar524,auVar516);
          auVar443 = vfmsub231ps_avx512vl(auVar443,auVar504,auVar1106);
          auVar443 = vsubps_avx(auVar443,auVar523);
          uVar46 = vcmpps_avx512vl(*(undefined1 (*) [16])*(undefined1 (*) [64])ptr1,auVar492,2);
          auVar443 = vfmsub231ps_avx512vl(auVar443,auVar496,auVar524);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar952._0_4_ =
               (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar443._0_4_) *
               (float)local_78._0_4_;
          auVar952._4_4_ =
               (float)((uint)bVar12 * auVar462._4_4_ | (uint)!bVar12 * auVar443._4_4_) *
               (float)local_78._4_4_;
          auVar952._8_4_ =
               (float)((uint)bVar13 * auVar462._8_4_ | (uint)!bVar13 * auVar443._8_4_) * fStack_70;
          auVar952._12_4_ =
               (float)((uint)bVar14 * auVar462._12_4_ | (uint)!bVar14 * auVar443._12_4_) * fStack_6c
          ;
          auVar443 = vminps_avx512vl(auVar952,auVar497);
          auVar436 = vmaxps_avx512vl(auVar443,auVar498);
          auVar437 = vfmadd231ps_avx512vl(auVar504,auVar436,auVar501);
          auVar1107._0_4_ = (int)auVar437._0_4_;
          auVar1107._4_4_ = (int)auVar437._4_4_;
          auVar1107._8_4_ = (int)auVar437._8_4_;
          auVar1107._12_4_ = (int)auVar437._12_4_;
          auVar443 = vcvtdq2ps_avx(auVar1107);
          uVar46 = vcmpps_avx512vl(auVar437,auVar443,1);
          auVar437 = vsubps_avx512vl(auVar443,auVar1340);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar525._0_4_ = (float)((uint)bVar11 * auVar437._0_4_ | (uint)!bVar11 * auVar443._0_4_);
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar525._4_4_ = (float)((uint)bVar11 * auVar437._4_4_ | (uint)!bVar11 * auVar443._4_4_);
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar525._8_4_ = (float)((uint)bVar11 * auVar437._8_4_ | (uint)!bVar11 * auVar443._8_4_);
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar525._12_4_ =
               (float)((uint)bVar11 * auVar437._12_4_ | (uint)!bVar11 * auVar443._12_4_);
          auVar443 = vfmsub231ps_avx512vl(auVar436,auVar525,auVar496);
          auVar443 = vfnmsub231ps_avx512vl(auVar443,auVar525,auVar516);
          auVar436 = vfmadd213ps_avx512vl(auVar502,auVar443,auVar520);
          auVar1163._0_4_ = auVar443._0_4_ * auVar443._0_4_;
          auVar1163._4_4_ = auVar443._4_4_ * auVar443._4_4_;
          auVar1163._8_4_ = auVar443._8_4_ * auVar443._8_4_;
          auVar1163._12_4_ = auVar443._12_4_ * auVar443._12_4_;
          auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar439);
          auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar440);
          auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar441);
          auVar436 = vfmadd213ps_avx512vl(auVar436,auVar443,auVar504);
          auVar443 = vfmadd213ps_fma(auVar436,auVar1163,auVar443);
          auVar953._0_4_ = (int)auVar525._0_4_;
          auVar953._4_4_ = (int)auVar525._4_4_;
          auVar953._8_4_ = (int)auVar525._8_4_;
          auVar953._12_4_ = (int)auVar525._12_4_;
          auVar436 = vpslld_avx(auVar953,0x17);
          auVar436 = vpaddd_avx512vl(auVar436,auVar442);
          auVar443 = vfmadd213ps_fma(auVar436,auVar443,auVar436);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar443;
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar422 = uVar872 + 4;
          iVar421 = uVar872 + 7;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        return;
      }
      lVar425 = 0;
      do {
        auVar917._0_4_ = powf(*(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4),auVar559._0_4_);
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar917._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    auVar559._0_4_ = *ptr1;
    if (iVar421 == 4) {
      auVar462 = vmovdqa64_avx512vl(ZEXT416((uint)auVar559._0_4_));
      auVar917._0_4_ = auVar462._0_4_;
      auVar882 = *(undefined1 (*) [16])ptr1;
      auVar730 = ZEXT3264(CONCAT1616(auVar882,auVar882));
    }
    else {
      auVar462 = vmovdqa64_avx512vl(ZEXT416((uint)auVar559._0_4_));
      auVar917._0_4_ = auVar462._0_4_;
      auVar882._4_4_ = auVar559._0_4_;
      auVar882._0_4_ = auVar559._0_4_;
      auVar882._8_4_ = auVar559._0_4_;
      auVar882._12_4_ = auVar559._0_4_;
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        auVar1004._4_4_ = auVar559._0_4_;
        auVar1004._0_4_ = auVar559._0_4_;
        auVar1004._8_4_ = auVar559._0_4_;
        auVar1004._12_4_ = auVar559._0_4_;
        auVar1004._16_4_ = auVar559._0_4_;
        auVar1004._20_4_ = auVar559._0_4_;
        auVar1004._24_4_ = auVar559._0_4_;
        auVar1004._28_4_ = auVar559._0_4_;
        auVar730 = ZEXT3264(auVar1004);
        if (iVar421 == 0x10) {
          auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_003a9f44;
        }
      }
    }
    auVar1004 = auVar730._0_32_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar1004,1);
LAB_003a9f44:
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      uVar46 = vcmpps_avx512f(auVar730,ZEXT864(0),2);
      auVar730 = vmaxps_avx512f(auVar730,(undefined1  [64])_ps512_min_norm_pos);
      auVar712 = vpsrld_avx512f(auVar730,0x17);
      auVar713 = vmovdqa64_avx512f((undefined1  [64])::_ps512_cephes_exp_p5);
      auVar730 = vpternlogd_avx512f(auVar730,auVar713,(undefined1  [64])_ps512_inv_mant_mask,0xec);
      auVar714 = vmovdqa64_avx512f((undefined1  [64])::_pi32_512_0x7f);
      auVar712 = vpsubd_avx512f(auVar712,auVar714);
      auVar712 = vcvtdq2ps_avx512f(auVar712);
      uVar426 = vcmpps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      auVar715 = vsubps_avx512f(auVar730,(undefined1  [64])::_ps512_1);
      auVar716 = vaddps_avx512f(auVar712,(undefined1  [64])::_ps512_1);
      bVar11 = (bool)((byte)uVar426 & 1);
      auVar848._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar716._0_4_;
      bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
      auVar848._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar716._4_4_;
      bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
      auVar848._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar716._8_4_;
      bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
      auVar848._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar716._12_4_;
      bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
      auVar848._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar716._16_4_;
      bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
      auVar848._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar716._20_4_;
      bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
      auVar848._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar716._24_4_;
      bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
      auVar848._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar716._28_4_;
      bVar28 = (byte)(uVar426 >> 8);
      bVar11 = (bool)(bVar28 & 1);
      auVar848._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar716._32_4_;
      bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
      auVar848._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar716._36_4_;
      bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
      auVar848._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar716._40_4_;
      bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
      auVar848._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar716._44_4_;
      bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
      auVar848._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar716._48_4_;
      bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
      auVar848._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar716._52_4_;
      bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
      auVar848._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar716._56_4_;
      bVar11 = SUB81(uVar426 >> 0xf,0);
      auVar848._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar716._60_4_;
      auVar730 = vaddps_avx512f(auVar715,auVar730);
      bVar11 = (bool)((byte)uVar426 & 1);
      auVar849._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * auVar715._0_4_;
      bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
      auVar849._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * auVar715._4_4_;
      bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
      auVar849._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * auVar715._8_4_;
      bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
      auVar849._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * auVar715._12_4_;
      bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
      auVar849._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * auVar715._16_4_;
      bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
      auVar849._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * auVar715._20_4_;
      bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
      auVar849._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * auVar715._24_4_;
      bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
      auVar849._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * auVar715._28_4_;
      bVar11 = (bool)(bVar28 & 1);
      auVar849._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * auVar715._32_4_;
      bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
      auVar849._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * auVar715._36_4_;
      bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
      auVar849._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * auVar715._40_4_;
      bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
      auVar849._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * auVar715._44_4_;
      bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
      auVar849._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * auVar715._48_4_;
      bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
      auVar849._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * auVar715._52_4_;
      bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
      auVar849._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * auVar715._56_4_;
      bVar11 = SUB81(uVar426 >> 0xf,0);
      auVar849._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * auVar715._60_4_;
      auVar730 = vfmadd213ps_avx512f((undefined1  [64])_ps512_cephes_log_p0,auVar849,
                                     (undefined1  [64])_ps512_cephes_log_p1);
      auVar730 = vfmadd213ps_avx512f(auVar730,auVar849,(undefined1  [64])_ps512_cephes_log_p2);
      auVar730 = vfmadd213ps_avx512f(auVar730,auVar849,(undefined1  [64])_ps512_cephes_log_p3);
      auVar730 = vfmadd213ps_avx512f(auVar730,auVar849,(undefined1  [64])_ps512_cephes_log_p4);
      auVar730 = vfmadd213ps_avx512f(auVar730,auVar849,(undefined1  [64])_ps512_cephes_log_p5);
      auVar730 = vfmadd213ps_avx512f(auVar730,auVar849,(undefined1  [64])_ps512_cephes_log_p6);
      auVar730 = vfmadd213ps_avx512f(auVar730,auVar849,(undefined1  [64])_ps512_cephes_log_p7);
      auVar730 = vfmadd213ps_avx512f(auVar730,auVar849,(undefined1  [64])_ps512_cephes_log_p8);
      auVar712 = vmulps_avx512f(auVar849,auVar849);
      auVar715 = vmulps_avx512f(auVar712,auVar849);
      auVar730 = vmulps_avx512f(auVar715,auVar730);
      auVar730 = vfmadd231ps_avx512f(auVar730,auVar848,(undefined1  [64])_ps512_cephes_log_q1);
      auVar730 = vfmsub231ps_avx512f(auVar730,auVar713,auVar712);
      auVar730 = vsubps_avx512f(auVar730,auVar849);
      auVar730 = vfmsub231ps_avx512f(auVar730,(undefined1  [64])_ps512_cephes_log_q2,auVar848);
      auVar712 = vpternlogd_avx512f(auVar712,auVar712,auVar712,0xff);
      bVar11 = (bool)((byte)uVar46 & 1);
      auVar850._0_4_ = (uint)bVar11 * auVar712._0_4_ | (uint)!bVar11 * auVar730._0_4_;
      bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
      auVar850._4_4_ = (uint)bVar11 * auVar712._4_4_ | (uint)!bVar11 * auVar730._4_4_;
      bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
      auVar850._8_4_ = (uint)bVar11 * auVar712._8_4_ | (uint)!bVar11 * auVar730._8_4_;
      bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar850._12_4_ = (uint)bVar11 * auVar712._12_4_ | (uint)!bVar11 * auVar730._12_4_;
      bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
      auVar850._16_4_ = (uint)bVar11 * auVar712._16_4_ | (uint)!bVar11 * auVar730._16_4_;
      bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
      auVar850._20_4_ = (uint)bVar11 * auVar712._20_4_ | (uint)!bVar11 * auVar730._20_4_;
      bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
      auVar850._24_4_ = (uint)bVar11 * auVar712._24_4_ | (uint)!bVar11 * auVar730._24_4_;
      bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
      auVar850._28_4_ = (uint)bVar11 * auVar712._28_4_ | (uint)!bVar11 * auVar730._28_4_;
      bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
      auVar850._32_4_ = (uint)bVar11 * auVar712._32_4_ | (uint)!bVar11 * auVar730._32_4_;
      bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
      auVar850._36_4_ = (uint)bVar11 * auVar712._36_4_ | (uint)!bVar11 * auVar730._36_4_;
      bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
      auVar850._40_4_ = (uint)bVar11 * auVar712._40_4_ | (uint)!bVar11 * auVar730._40_4_;
      bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
      auVar850._44_4_ = (uint)bVar11 * auVar712._44_4_ | (uint)!bVar11 * auVar730._44_4_;
      bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
      auVar850._48_4_ = (uint)bVar11 * auVar712._48_4_ | (uint)!bVar11 * auVar730._48_4_;
      bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
      auVar850._52_4_ = (uint)bVar11 * auVar712._52_4_ | (uint)!bVar11 * auVar730._52_4_;
      bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
      auVar850._56_4_ = (uint)bVar11 * auVar712._56_4_ | (uint)!bVar11 * auVar730._56_4_;
      bVar11 = SUB81(uVar46 >> 0xf,0);
      auVar850._60_4_ = (uint)bVar11 * auVar712._60_4_ | (uint)!bVar11 * auVar730._60_4_;
      auVar730 = vbroadcastss_avx512f(ZEXT416(0x80000000));
      auVar712 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q2,auVar730);
      auVar730 = vxorps_avx512dq((undefined1  [64])_ps512_cephes_log_q1,auVar730);
      iVar421 = 0xf;
      do {
        auVar715 = vmulps_avx512f(auVar850,*(undefined1 (*) [64])ptr);
        auVar715 = vminps_avx512f(auVar715,(undefined1  [64])afVar405);
        auVar715 = vmaxps_avx512f(auVar715,(undefined1  [64])afVar406);
        auVar716 = vfmadd213ps_avx512f((undefined1  [64])afVar407,auVar715,auVar713);
        auVar717 = vrndscaleps_avx512f(auVar716,1);
        uVar46 = vcmpps_avx512f(auVar716,auVar717,1);
        auVar716 = vsubps_avx512f(auVar717,(undefined1  [64])afVar404);
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar851._0_4_ = (uint)bVar11 * auVar716._0_4_ | (uint)!bVar11 * auVar717._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar851._4_4_ = (uint)bVar11 * auVar716._4_4_ | (uint)!bVar11 * auVar717._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar851._8_4_ = (uint)bVar11 * auVar716._8_4_ | (uint)!bVar11 * auVar717._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar851._12_4_ = (uint)bVar11 * auVar716._12_4_ | (uint)!bVar11 * auVar717._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar851._16_4_ = (uint)bVar11 * auVar716._16_4_ | (uint)!bVar11 * auVar717._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar851._20_4_ = (uint)bVar11 * auVar716._20_4_ | (uint)!bVar11 * auVar717._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar851._24_4_ = (uint)bVar11 * auVar716._24_4_ | (uint)!bVar11 * auVar717._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        auVar851._28_4_ = (uint)bVar11 * auVar716._28_4_ | (uint)!bVar11 * auVar717._28_4_;
        bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
        auVar851._32_4_ = (uint)bVar11 * auVar716._32_4_ | (uint)!bVar11 * auVar717._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        auVar851._36_4_ = (uint)bVar11 * auVar716._36_4_ | (uint)!bVar11 * auVar717._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        auVar851._40_4_ = (uint)bVar11 * auVar716._40_4_ | (uint)!bVar11 * auVar717._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        auVar851._44_4_ = (uint)bVar11 * auVar716._44_4_ | (uint)!bVar11 * auVar717._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        auVar851._48_4_ = (uint)bVar11 * auVar716._48_4_ | (uint)!bVar11 * auVar717._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        auVar851._52_4_ = (uint)bVar11 * auVar716._52_4_ | (uint)!bVar11 * auVar717._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        auVar851._56_4_ = (uint)bVar11 * auVar716._56_4_ | (uint)!bVar11 * auVar717._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        auVar851._60_4_ = (uint)bVar11 * auVar716._60_4_ | (uint)!bVar11 * auVar717._60_4_;
        auVar715 = vfmadd231ps_avx512f(auVar715,auVar851,auVar712);
        auVar715 = vfmadd231ps_avx512f(auVar715,auVar851,auVar730);
        auVar716 = vfmadd213ps_avx512f(auVar715,(undefined1  [64])afVar408,
                                       (undefined1  [64])afVar409);
        auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar410);
        auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar411);
        auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,(undefined1  [64])afVar412);
        auVar717 = vmulps_avx512f(auVar715,auVar715);
        auVar716 = vfmadd213ps_avx512f(auVar716,auVar715,auVar713);
        auVar715 = vfmadd213ps_avx512f(auVar716,auVar717,auVar715);
        auVar716 = vcvttps2dq_avx512f(auVar851);
        auVar715 = vaddps_avx512f(auVar715,(undefined1  [64])afVar404);
        auVar716 = vpaddd_avx512f(auVar716,auVar714);
        auVar716 = vpslld_avx512f(auVar716,0x17);
        auVar715 = vmulps_avx512f(auVar715,auVar716);
        *(undefined1 (*) [64])outptr = auVar715;
        ptr = (float *)((long)ptr + 0x40);
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
      in_ZMM15 = afVar412;
    }
    if ((int)(uVar422 | 7) < (int)uVar424) {
      auVar205._8_4_ = 0x800000;
      auVar205._0_8_ = 0x80000000800000;
      auVar205._12_4_ = 0x800000;
      auVar205._16_4_ = 0x800000;
      auVar205._20_4_ = 0x800000;
      auVar205._24_4_ = 0x800000;
      auVar205._28_4_ = 0x800000;
      auVar671 = vmaxps_avx512vl(auVar1004,auVar205);
      auVar675 = vpsrld_avx2(auVar671,0x17);
      auVar1189._8_4_ = 0x3f000000;
      auVar1189._0_8_ = 0x3f0000003f000000;
      auVar1189._12_4_ = 0x3f000000;
      auVar1189._16_4_ = 0x3f000000;
      auVar1189._20_4_ = 0x3f000000;
      auVar1189._24_4_ = 0x3f000000;
      auVar1189._28_4_ = 0x3f000000;
      auVar206._8_4_ = 0x807fffff;
      auVar206._0_8_ = 0x807fffff807fffff;
      auVar206._12_4_ = 0x807fffff;
      auVar206._16_4_ = 0x807fffff;
      auVar206._20_4_ = 0x807fffff;
      auVar206._24_4_ = 0x807fffff;
      auVar206._28_4_ = 0x807fffff;
      auVar672 = vpternlogd_avx512vl(auVar1189,auVar671,auVar206,0xf8);
      auVar207._8_4_ = 0xffffff82;
      auVar207._0_8_ = 0xffffff82ffffff82;
      auVar207._12_4_ = 0xffffff82;
      auVar207._16_4_ = 0xffffff82;
      auVar207._20_4_ = 0xffffff82;
      auVar207._24_4_ = 0xffffff82;
      auVar207._28_4_ = 0xffffff82;
      auVar671 = vpaddd_avx512vl(auVar675,auVar207);
      auVar671 = vcvtdq2ps_avx(auVar671);
      auVar208._8_4_ = 0x3f3504f3;
      auVar208._0_8_ = 0x3f3504f33f3504f3;
      auVar208._12_4_ = 0x3f3504f3;
      auVar208._16_4_ = 0x3f3504f3;
      auVar208._20_4_ = 0x3f3504f3;
      auVar208._24_4_ = 0x3f3504f3;
      auVar208._28_4_ = 0x3f3504f3;
      uVar46 = vcmpps_avx512vl(auVar672,auVar208,1);
      auVar1068._8_4_ = 0xbf800000;
      auVar1068._0_8_ = 0xbf800000bf800000;
      auVar1068._12_4_ = 0xbf800000;
      auVar1068._16_4_ = 0xbf800000;
      auVar1068._20_4_ = 0xbf800000;
      auVar1068._24_4_ = 0xbf800000;
      auVar1068._28_4_ = 0xbf800000;
      auVar1314._0_4_ = auVar672._0_4_ + -1.0;
      auVar1314._4_4_ = auVar672._4_4_ + -1.0;
      auVar1314._8_4_ = auVar672._8_4_ + -1.0;
      auVar1314._12_4_ = auVar672._12_4_ + -1.0;
      auVar1314._16_4_ = auVar672._16_4_ + -1.0;
      auVar1314._20_4_ = auVar672._20_4_ + -1.0;
      auVar1314._24_4_ = auVar672._24_4_ + -1.0;
      auVar1314._28_4_ = auVar672._28_4_ + -1.0;
      auVar675 = vaddps_avx512vl(auVar671,auVar1068);
      bVar11 = (bool)((byte)uVar46 & 1);
      auVar685._0_4_ = (uint)bVar11 * auVar675._0_4_ | (uint)!bVar11 * auVar671._0_4_;
      bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
      auVar685._4_4_ = (uint)bVar11 * auVar675._4_4_ | (uint)!bVar11 * auVar671._4_4_;
      bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
      auVar685._8_4_ = (uint)bVar11 * auVar675._8_4_ | (uint)!bVar11 * auVar671._8_4_;
      bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar685._12_4_ = (uint)bVar11 * auVar675._12_4_ | (uint)!bVar11 * auVar671._12_4_;
      bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
      auVar685._16_4_ = (uint)bVar11 * auVar675._16_4_ | (uint)!bVar11 * auVar671._16_4_;
      bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
      auVar685._20_4_ = (uint)bVar11 * auVar675._20_4_ | (uint)!bVar11 * auVar671._20_4_;
      bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
      auVar685._24_4_ = (uint)bVar11 * auVar675._24_4_ | (uint)!bVar11 * auVar671._24_4_;
      bVar11 = SUB81(uVar46 >> 7,0);
      auVar685._28_4_ = (uint)bVar11 * auVar675._28_4_ | (uint)!bVar11 * auVar671._28_4_;
      auVar671 = vaddps_avx512vl(auVar1314,auVar672);
      bVar11 = (bool)((byte)uVar46 & 1);
      auVar686._0_4_ = (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * (int)auVar1314._0_4_)
      ;
      bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
      auVar686._4_4_ = (float)((uint)bVar11 * auVar671._4_4_ | (uint)!bVar11 * (int)auVar1314._4_4_)
      ;
      bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
      auVar686._8_4_ = (float)((uint)bVar11 * auVar671._8_4_ | (uint)!bVar11 * (int)auVar1314._8_4_)
      ;
      bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar686._12_4_ =
           (float)((uint)bVar11 * auVar671._12_4_ | (uint)!bVar11 * (int)auVar1314._12_4_);
      bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
      auVar686._16_4_ =
           (float)((uint)bVar11 * auVar671._16_4_ | (uint)!bVar11 * (int)auVar1314._16_4_);
      bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
      auVar686._20_4_ =
           (float)((uint)bVar11 * auVar671._20_4_ | (uint)!bVar11 * (int)auVar1314._20_4_);
      bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
      auVar686._24_4_ =
           (float)((uint)bVar11 * auVar671._24_4_ | (uint)!bVar11 * (int)auVar1314._24_4_);
      bVar11 = SUB81(uVar46 >> 7,0);
      auVar686._28_4_ = (uint)bVar11 * auVar671._28_4_ | (uint)!bVar11 * (int)auVar1314._28_4_;
      auVar387._4_4_ = auVar686._4_4_ * auVar686._4_4_;
      auVar387._0_4_ = auVar686._0_4_ * auVar686._0_4_;
      auVar387._8_4_ = auVar686._8_4_ * auVar686._8_4_;
      auVar387._12_4_ = auVar686._12_4_ * auVar686._12_4_;
      auVar387._16_4_ = auVar686._16_4_ * auVar686._16_4_;
      auVar387._20_4_ = auVar686._20_4_ * auVar686._20_4_;
      auVar387._24_4_ = auVar686._24_4_ * auVar686._24_4_;
      auVar387._28_4_ = auVar672._28_4_;
      auVar1370._8_4_ = 0x3d9021bb;
      auVar1370._0_8_ = 0x3d9021bb3d9021bb;
      auVar1370._12_4_ = 0x3d9021bb;
      auVar1370._16_4_ = 0x3d9021bb;
      auVar1370._20_4_ = 0x3d9021bb;
      auVar1370._24_4_ = 0x3d9021bb;
      auVar1370._28_4_ = 0x3d9021bb;
      auVar209._8_4_ = 0xbdebd1b8;
      auVar209._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar209._12_4_ = 0xbdebd1b8;
      auVar209._16_4_ = 0xbdebd1b8;
      auVar209._20_4_ = 0xbdebd1b8;
      auVar209._24_4_ = 0xbdebd1b8;
      auVar209._28_4_ = 0xbdebd1b8;
      auVar671 = vfmadd213ps_avx512vl(auVar1370,auVar686,auVar209);
      auVar210._8_4_ = 0x3def251a;
      auVar210._0_8_ = 0x3def251a3def251a;
      auVar210._12_4_ = 0x3def251a;
      auVar210._16_4_ = 0x3def251a;
      auVar210._20_4_ = 0x3def251a;
      auVar210._24_4_ = 0x3def251a;
      auVar210._28_4_ = 0x3def251a;
      auVar671 = vfmadd213ps_avx512vl(auVar671,auVar686,auVar210);
      auVar211._8_4_ = 0xbdfe5d4f;
      auVar211._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar211._12_4_ = 0xbdfe5d4f;
      auVar211._16_4_ = 0xbdfe5d4f;
      auVar211._20_4_ = 0xbdfe5d4f;
      auVar211._24_4_ = 0xbdfe5d4f;
      auVar211._28_4_ = 0xbdfe5d4f;
      auVar671 = vfmadd213ps_avx512vl(auVar671,auVar686,auVar211);
      auVar212._8_4_ = 0x3e11e9bf;
      auVar212._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar212._12_4_ = 0x3e11e9bf;
      auVar212._16_4_ = 0x3e11e9bf;
      auVar212._20_4_ = 0x3e11e9bf;
      auVar212._24_4_ = 0x3e11e9bf;
      auVar212._28_4_ = 0x3e11e9bf;
      auVar671 = vfmadd213ps_avx512vl(auVar671,auVar686,auVar212);
      auVar213._8_4_ = 0xbe2aae50;
      auVar213._0_8_ = 0xbe2aae50be2aae50;
      auVar213._12_4_ = 0xbe2aae50;
      auVar213._16_4_ = 0xbe2aae50;
      auVar213._20_4_ = 0xbe2aae50;
      auVar213._24_4_ = 0xbe2aae50;
      auVar213._28_4_ = 0xbe2aae50;
      auVar671 = vfmadd213ps_avx512vl(auVar671,auVar686,auVar213);
      auVar214._8_4_ = 0x3e4cceac;
      auVar214._0_8_ = 0x3e4cceac3e4cceac;
      auVar214._12_4_ = 0x3e4cceac;
      auVar214._16_4_ = 0x3e4cceac;
      auVar214._20_4_ = 0x3e4cceac;
      auVar214._24_4_ = 0x3e4cceac;
      auVar214._28_4_ = 0x3e4cceac;
      auVar671 = vfmadd213ps_avx512vl(auVar671,auVar686,auVar214);
      auVar215._8_4_ = 0xbe7ffffc;
      auVar215._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar215._12_4_ = 0xbe7ffffc;
      auVar215._16_4_ = 0xbe7ffffc;
      auVar215._20_4_ = 0xbe7ffffc;
      auVar215._24_4_ = 0xbe7ffffc;
      auVar215._28_4_ = 0xbe7ffffc;
      auVar671 = vfmadd213ps_avx512vl(auVar671,auVar686,auVar215);
      auVar216._8_4_ = 0x3eaaaaaa;
      auVar216._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar216._12_4_ = 0x3eaaaaaa;
      auVar216._16_4_ = 0x3eaaaaaa;
      auVar216._20_4_ = 0x3eaaaaaa;
      auVar216._24_4_ = 0x3eaaaaaa;
      auVar216._28_4_ = 0x3eaaaaaa;
      auVar671 = vfmadd213ps_avx512vl(auVar671,auVar686,auVar216);
      auVar388._4_4_ = auVar686._4_4_ * auVar686._4_4_ * auVar686._4_4_ * auVar671._4_4_;
      auVar388._0_4_ = auVar686._0_4_ * auVar686._0_4_ * auVar686._0_4_ * auVar671._0_4_;
      auVar388._8_4_ = auVar686._8_4_ * auVar686._8_4_ * auVar686._8_4_ * auVar671._8_4_;
      auVar388._12_4_ = auVar686._12_4_ * auVar686._12_4_ * auVar686._12_4_ * auVar671._12_4_;
      auVar388._16_4_ = auVar686._16_4_ * auVar686._16_4_ * auVar686._16_4_ * auVar671._16_4_;
      auVar388._20_4_ = auVar686._20_4_ * auVar686._20_4_ * auVar686._20_4_ * auVar671._20_4_;
      auVar388._24_4_ = auVar686._24_4_ * auVar686._24_4_ * auVar686._24_4_ * auVar671._24_4_;
      auVar388._28_4_ = auVar671._28_4_;
      auVar217._8_4_ = 0xb95e8083;
      auVar217._0_8_ = 0xb95e8083b95e8083;
      auVar217._12_4_ = 0xb95e8083;
      auVar217._16_4_ = 0xb95e8083;
      auVar217._20_4_ = 0xb95e8083;
      auVar217._24_4_ = 0xb95e8083;
      auVar217._28_4_ = 0xb95e8083;
      auVar671 = vfmadd231ps_avx512vl(auVar388,auVar685,auVar217);
      auVar675 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      uVar46 = vcmpps_avx512vl(auVar1004,auVar675,2);
      auVar218._8_4_ = 0x3f000000;
      auVar218._0_8_ = 0x3f0000003f000000;
      auVar218._12_4_ = 0x3f000000;
      auVar218._16_4_ = 0x3f000000;
      auVar218._20_4_ = 0x3f000000;
      auVar218._24_4_ = 0x3f000000;
      auVar218._28_4_ = 0x3f000000;
      auVar671 = vfmsub231ps_avx512vl(auVar671,auVar387,auVar218);
      auVar671 = vsubps_avx(auVar671,auVar686);
      auVar219._8_4_ = 0x3f318000;
      auVar219._0_8_ = 0x3f3180003f318000;
      auVar219._12_4_ = 0x3f318000;
      auVar219._16_4_ = 0x3f318000;
      auVar219._20_4_ = 0x3f318000;
      auVar219._24_4_ = 0x3f318000;
      auVar219._28_4_ = 0x3f318000;
      auVar672 = vfmsub231ps_avx512vl(auVar671,auVar685,auVar219);
      auVar671 = vpcmpeqd_avx2(auVar675,auVar675);
      bVar11 = (bool)((byte)uVar46 & 1);
      bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
      bVar15 = (bool)((byte)(uVar46 >> 4) & 1);
      bVar16 = (bool)((byte)(uVar46 >> 5) & 1);
      bVar17 = (bool)((byte)(uVar46 >> 6) & 1);
      auVar1130._8_4_ = 0x42b0c0a5;
      auVar1130._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1130._12_4_ = 0x42b0c0a5;
      auVar1130._16_4_ = 0x42b0c0a5;
      auVar1130._20_4_ = 0x42b0c0a5;
      auVar1130._24_4_ = 0x42b0c0a5;
      auVar1130._28_4_ = 0x42b0c0a5;
      auVar1190._8_4_ = 0xc2b0c0a5;
      auVar1190._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar1190._12_4_ = 0xc2b0c0a5;
      auVar1190._16_4_ = 0xc2b0c0a5;
      auVar1190._20_4_ = 0xc2b0c0a5;
      auVar1190._24_4_ = 0xc2b0c0a5;
      auVar1190._28_4_ = 0xc2b0c0a5;
      auVar1254._8_4_ = 0x3f000000;
      auVar1254._0_8_ = 0x3f0000003f000000;
      auVar1254._12_4_ = 0x3f000000;
      auVar1254._16_4_ = 0x3f000000;
      auVar1254._20_4_ = 0x3f000000;
      auVar1254._24_4_ = 0x3f000000;
      auVar1254._28_4_ = 0x3f000000;
      auVar1315._8_4_ = 0x3fb8aa3b;
      auVar1315._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar1315._12_4_ = 0x3fb8aa3b;
      auVar1315._16_4_ = 0x3fb8aa3b;
      auVar1315._20_4_ = 0x3fb8aa3b;
      auVar1315._24_4_ = 0x3fb8aa3b;
      auVar1315._28_4_ = 0x3fb8aa3b;
      auVar1371._8_4_ = 0x3f318000;
      auVar1371._0_8_ = 0x3f3180003f318000;
      auVar1371._12_4_ = 0x3f318000;
      auVar1371._16_4_ = 0x3f318000;
      auVar1371._20_4_ = 0x3f318000;
      auVar1371._24_4_ = 0x3f318000;
      auVar1371._28_4_ = 0x3f318000;
      auVar1427._8_4_ = 0x395e8083;
      auVar1427._0_8_ = 0x395e8083395e8083;
      auVar1427._12_4_ = 0x395e8083;
      auVar1427._16_4_ = 0x395e8083;
      auVar1427._20_4_ = 0x395e8083;
      auVar1427._24_4_ = 0x395e8083;
      auVar1427._28_4_ = 0x395e8083;
      auVar1481._8_4_ = 0x39506967;
      auVar1481._0_8_ = 0x3950696739506967;
      auVar1481._12_4_ = 0x39506967;
      auVar1481._16_4_ = 0x39506967;
      auVar1481._20_4_ = 0x39506967;
      auVar1481._24_4_ = 0x39506967;
      auVar1481._28_4_ = 0x39506967;
      auVar1535._8_4_ = 0x3ab743ce;
      auVar1535._0_8_ = 0x3ab743ce3ab743ce;
      auVar1535._12_4_ = 0x3ab743ce;
      auVar1535._16_4_ = 0x3ab743ce;
      auVar1535._20_4_ = 0x3ab743ce;
      auVar1535._24_4_ = 0x3ab743ce;
      auVar1535._28_4_ = 0x3ab743ce;
      auVar1589._8_4_ = 0x3c088908;
      auVar1589._0_8_ = 0x3c0889083c088908;
      auVar1589._12_4_ = 0x3c088908;
      auVar1589._16_4_ = 0x3c088908;
      auVar1589._20_4_ = 0x3c088908;
      auVar1589._24_4_ = 0x3c088908;
      auVar1589._28_4_ = 0x3c088908;
      auVar1643._8_4_ = 0x3d2aa9c1;
      auVar1643._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar1643._12_4_ = 0x3d2aa9c1;
      auVar1643._16_4_ = 0x3d2aa9c1;
      auVar1643._20_4_ = 0x3d2aa9c1;
      auVar1643._24_4_ = 0x3d2aa9c1;
      auVar1643._28_4_ = 0x3d2aa9c1;
      auVar1697._8_4_ = 0x3e2aaaaa;
      auVar1697._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar1697._12_4_ = 0x3e2aaaaa;
      auVar1697._16_4_ = 0x3e2aaaaa;
      auVar1697._20_4_ = 0x3e2aaaaa;
      auVar1697._24_4_ = 0x3e2aaaaa;
      auVar1697._28_4_ = 0x3e2aaaaa;
      auVar1748._8_4_ = 0x3f800000;
      auVar1748._0_8_ = 0x3f8000003f800000;
      auVar1748._12_4_ = 0x3f800000;
      auVar1748._16_4_ = 0x3f800000;
      auVar1748._20_4_ = 0x3f800000;
      auVar1748._24_4_ = 0x3f800000;
      auVar1748._28_4_ = 0x3f800000;
      uVar872 = uVar422;
      do {
        auVar1803._0_4_ =
             (float)((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar672._0_4_) *
             *(float *)*(undefined1 (*) [64])ptr;
        auVar1803._4_4_ =
             (float)((uint)bVar12 * auVar671._4_4_ | (uint)!bVar12 * auVar672._4_4_) *
             *(float *)(*(undefined1 (*) [64])ptr + 4);
        auVar1803._8_4_ =
             (float)((uint)bVar13 * auVar671._8_4_ | (uint)!bVar13 * auVar672._8_4_) *
             *(float *)(*(undefined1 (*) [64])ptr + 8);
        auVar1803._12_4_ =
             (float)((uint)bVar14 * auVar671._12_4_ | (uint)!bVar14 * auVar672._12_4_) *
             *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        auVar1803._16_4_ =
             (float)((uint)bVar15 * auVar671._16_4_ | (uint)!bVar15 * auVar672._16_4_) *
             *(float *)(*(undefined1 (*) [64])ptr + 0x10);
        auVar1803._20_4_ =
             (float)((uint)bVar16 * auVar671._20_4_ | (uint)!bVar16 * auVar672._20_4_) *
             *(float *)(*(undefined1 (*) [64])ptr + 0x14);
        auVar1803._28_36_ = in_ZMM15._28_36_;
        auVar1803._24_4_ =
             (float)((uint)bVar17 * auVar671._24_4_ | (uint)!bVar17 * auVar672._24_4_) *
             *(float *)(*(undefined1 (*) [64])ptr + 0x18);
        auVar675 = vminps_avx(auVar1803._0_32_,auVar1130);
        auVar675 = vmaxps_avx(auVar675,auVar1190);
        auVar684 = vfmadd231ps_avx512vl(auVar1254,auVar675,auVar1315);
        auVar676 = vrndscaleps_avx512vl(auVar684,1);
        uVar46 = vcmpps_avx512vl(auVar684,auVar676,1);
        auVar684 = vaddps_avx512vl(auVar676,auVar1068);
        bVar18 = (bool)((byte)uVar46 & 1);
        auVar687._0_4_ = (uint)bVar18 * auVar684._0_4_ | (uint)!bVar18 * auVar676._0_4_;
        bVar18 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar687._4_4_ = (uint)bVar18 * auVar684._4_4_ | (uint)!bVar18 * auVar676._4_4_;
        bVar18 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar687._8_4_ = (uint)bVar18 * auVar684._8_4_ | (uint)!bVar18 * auVar676._8_4_;
        bVar18 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar687._12_4_ = (uint)bVar18 * auVar684._12_4_ | (uint)!bVar18 * auVar676._12_4_;
        bVar18 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar687._16_4_ = (uint)bVar18 * auVar684._16_4_ | (uint)!bVar18 * auVar676._16_4_;
        bVar18 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar687._20_4_ = (uint)bVar18 * auVar684._20_4_ | (uint)!bVar18 * auVar676._20_4_;
        bVar18 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar687._24_4_ = (uint)bVar18 * auVar684._24_4_ | (uint)!bVar18 * auVar676._24_4_;
        bVar18 = SUB81(uVar46 >> 7,0);
        auVar687._28_4_ = (uint)bVar18 * auVar684._28_4_ | (uint)!bVar18 * auVar676._28_4_;
        auVar675 = vfmsub231ps_avx512vl(auVar675,auVar687,auVar1371);
        auVar675 = vfmsub231ps_avx512vl(auVar675,auVar687,auVar1427);
        auVar684 = vfmadd213ps_avx512vl(auVar1481,auVar675,auVar1535);
        auVar676 = vmulps_avx512vl(auVar675,auVar675);
        auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1589);
        auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1643);
        auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1697);
        auVar684 = vfmadd213ps_avx512vl(auVar684,auVar675,auVar1254);
        auVar684 = vfmadd213ps_avx512vl(auVar684,auVar676,auVar675);
        auVar675 = vcvttps2dq_avx512vl(auVar687);
        auVar675 = vpslld_avx2(auVar675,0x17);
        auVar675 = vpaddd_avx2(auVar675,auVar1748);
        auVar675 = vfmadd213ps_avx512vl(auVar675,auVar684,auVar675);
        in_ZMM15 = (float  [16])ZEXT3264(auVar675);
        *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar675;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar422 = uVar872 + 8;
        iVar421 = uVar872 + 0xf;
        uVar872 = uVar422;
      } while (iVar421 < (int)uVar424);
    }
    if ((int)(uVar422 | 3) < (int)uVar424) {
      auVar75._8_4_ = 0x800000;
      auVar75._0_8_ = 0x80000000800000;
      auVar75._12_4_ = 0x800000;
      auVar462 = vmaxps_avx512vl(auVar882,auVar75);
      auVar493 = vpsrld_avx(auVar462,0x17);
      auVar1101._8_4_ = 0x3f000000;
      auVar1101._0_8_ = 0x3f0000003f000000;
      auVar1101._12_4_ = 0x3f000000;
      auVar76._8_4_ = 0x807fffff;
      auVar76._0_8_ = 0x807fffff807fffff;
      auVar76._12_4_ = 0x807fffff;
      auVar492 = vpternlogd_avx512vl(auVar1101,auVar462,auVar76,0xf8);
      auVar77._8_4_ = 0xffffff82;
      auVar77._0_8_ = 0xffffff82ffffff82;
      auVar77._12_4_ = 0xffffff82;
      auVar462 = vpaddd_avx512vl(auVar493,auVar77);
      auVar462 = vcvtdq2ps_avx(auVar462);
      auVar78._8_4_ = 0x3f3504f3;
      auVar78._0_8_ = 0x3f3504f33f3504f3;
      auVar78._12_4_ = 0x3f3504f3;
      uVar46 = vcmpps_avx512vl(auVar492,auVar78,1);
      auVar940._8_4_ = 0xbf800000;
      auVar940._0_8_ = 0xbf800000bf800000;
      auVar940._12_4_ = 0xbf800000;
      auVar1209._0_4_ = auVar492._0_4_ + -1.0;
      auVar1209._4_4_ = auVar492._4_4_ + -1.0;
      auVar1209._8_4_ = auVar492._8_4_ + -1.0;
      auVar1209._12_4_ = auVar492._12_4_ + -1.0;
      auVar493 = vaddps_avx512vl(auVar462,auVar940);
      bVar11 = (bool)((byte)uVar46 & 1);
      auVar505._0_4_ = (uint)bVar11 * auVar493._0_4_ | (uint)!bVar11 * auVar462._0_4_;
      bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
      auVar505._4_4_ = (uint)bVar11 * auVar493._4_4_ | (uint)!bVar11 * auVar462._4_4_;
      bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
      auVar505._8_4_ = (uint)bVar11 * auVar493._8_4_ | (uint)!bVar11 * auVar462._8_4_;
      bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar505._12_4_ = (uint)bVar11 * auVar493._12_4_ | (uint)!bVar11 * auVar462._12_4_;
      auVar462 = vaddps_avx512vl(auVar1209,auVar492);
      bVar11 = (bool)((byte)uVar46 & 1);
      auVar506._0_4_ = (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * (int)auVar1209._0_4_)
      ;
      bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
      auVar506._4_4_ = (float)((uint)bVar11 * auVar462._4_4_ | (uint)!bVar11 * (int)auVar1209._4_4_)
      ;
      bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
      auVar506._8_4_ = (float)((uint)bVar11 * auVar462._8_4_ | (uint)!bVar11 * (int)auVar1209._8_4_)
      ;
      bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar506._12_4_ =
           (float)((uint)bVar11 * auVar462._12_4_ | (uint)!bVar11 * (int)auVar1209._12_4_);
      auVar1102._0_4_ = auVar506._0_4_ * auVar506._0_4_;
      auVar1102._4_4_ = auVar506._4_4_ * auVar506._4_4_;
      auVar1102._8_4_ = auVar506._8_4_ * auVar506._8_4_;
      auVar1102._12_4_ = auVar506._12_4_ * auVar506._12_4_;
      auVar1273._8_4_ = 0x3d9021bb;
      auVar1273._0_8_ = 0x3d9021bb3d9021bb;
      auVar1273._12_4_ = 0x3d9021bb;
      auVar79._8_4_ = 0xbdebd1b8;
      auVar79._0_8_ = 0xbdebd1b8bdebd1b8;
      auVar79._12_4_ = 0xbdebd1b8;
      auVar462 = vfmadd213ps_avx512vl(auVar1273,auVar506,auVar79);
      auVar80._8_4_ = 0x3def251a;
      auVar80._0_8_ = 0x3def251a3def251a;
      auVar80._12_4_ = 0x3def251a;
      auVar462 = vfmadd213ps_avx512vl(auVar462,auVar506,auVar80);
      auVar81._8_4_ = 0xbdfe5d4f;
      auVar81._0_8_ = 0xbdfe5d4fbdfe5d4f;
      auVar81._12_4_ = 0xbdfe5d4f;
      auVar462 = vfmadd213ps_avx512vl(auVar462,auVar506,auVar81);
      auVar82._8_4_ = 0x3e11e9bf;
      auVar82._0_8_ = 0x3e11e9bf3e11e9bf;
      auVar82._12_4_ = 0x3e11e9bf;
      auVar462 = vfmadd213ps_avx512vl(auVar462,auVar506,auVar82);
      auVar83._8_4_ = 0xbe2aae50;
      auVar83._0_8_ = 0xbe2aae50be2aae50;
      auVar83._12_4_ = 0xbe2aae50;
      auVar462 = vfmadd213ps_avx512vl(auVar462,auVar506,auVar83);
      auVar84._8_4_ = 0x3e4cceac;
      auVar84._0_8_ = 0x3e4cceac3e4cceac;
      auVar84._12_4_ = 0x3e4cceac;
      auVar462 = vfmadd213ps_avx512vl(auVar462,auVar506,auVar84);
      auVar85._8_4_ = 0xbe7ffffc;
      auVar85._0_8_ = 0xbe7ffffcbe7ffffc;
      auVar85._12_4_ = 0xbe7ffffc;
      auVar462 = vfmadd213ps_avx512vl(auVar462,auVar506,auVar85);
      auVar86._8_4_ = 0x3eaaaaaa;
      auVar86._0_8_ = 0x3eaaaaaa3eaaaaaa;
      auVar86._12_4_ = 0x3eaaaaaa;
      auVar462 = vfmadd213ps_avx512vl(auVar462,auVar506,auVar86);
      auVar1274._0_4_ = auVar1102._0_4_ * auVar506._0_4_ * auVar462._0_4_;
      auVar1274._4_4_ = auVar1102._4_4_ * auVar506._4_4_ * auVar462._4_4_;
      auVar1274._8_4_ = auVar1102._8_4_ * auVar506._8_4_ * auVar462._8_4_;
      auVar1274._12_4_ = auVar1102._12_4_ * auVar506._12_4_ * auVar462._12_4_;
      auVar87._8_4_ = 0xb95e8083;
      auVar87._0_8_ = 0xb95e8083b95e8083;
      auVar87._12_4_ = 0xb95e8083;
      auVar462 = vfmadd231ps_avx512vl(auVar1274,auVar505,auVar87);
      uVar46 = vcmpps_avx512vl(auVar882,(undefined1  [16])0x0,2);
      auVar88._8_4_ = 0x3f000000;
      auVar88._0_8_ = 0x3f0000003f000000;
      auVar88._12_4_ = 0x3f000000;
      auVar462 = vfmsub231ps_avx512vl(auVar462,auVar1102,auVar88);
      auVar462 = vsubps_avx(auVar462,auVar506);
      auVar89._8_4_ = 0x3f318000;
      auVar89._0_8_ = 0x3f3180003f318000;
      auVar89._12_4_ = 0x3f318000;
      auVar492 = vfmsub231ps_avx512vl(auVar462,auVar505,auVar89);
      auVar462 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
      bVar11 = (bool)((byte)uVar46 & 1);
      bVar12 = (bool)((byte)(uVar46 >> 1) & 1);
      bVar13 = (bool)((byte)(uVar46 >> 2) & 1);
      bVar14 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar1026._8_4_ = 0x42b0c0a5;
      auVar1026._0_8_ = 0x42b0c0a542b0c0a5;
      auVar1026._12_4_ = 0x42b0c0a5;
      auVar1103._8_4_ = 0xc2b0c0a5;
      auVar1103._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar1103._12_4_ = 0xc2b0c0a5;
      auVar1159._8_4_ = 0x3f000000;
      auVar1159._0_8_ = 0x3f0000003f000000;
      auVar1159._12_4_ = 0x3f000000;
      auVar1210._8_4_ = 0x3fb8aa3b;
      auVar1210._0_8_ = 0x3fb8aa3b3fb8aa3b;
      auVar1210._12_4_ = 0x3fb8aa3b;
      auVar1275._8_4_ = 0x3f318000;
      auVar1275._0_8_ = 0x3f3180003f318000;
      auVar1275._12_4_ = 0x3f318000;
      auVar1336._8_4_ = 0x395e8083;
      auVar1336._0_8_ = 0x395e8083395e8083;
      auVar1336._12_4_ = 0x395e8083;
      auVar1392._8_4_ = 0x39506967;
      auVar1392._0_8_ = 0x3950696739506967;
      auVar1392._12_4_ = 0x39506967;
      auVar1446._8_4_ = 0x3ab743ce;
      auVar1446._0_8_ = 0x3ab743ce3ab743ce;
      auVar1446._12_4_ = 0x3ab743ce;
      auVar1500._8_4_ = 0x3c088908;
      auVar1500._0_8_ = 0x3c0889083c088908;
      auVar1500._12_4_ = 0x3c088908;
      auVar1554._8_4_ = 0x3d2aa9c1;
      auVar1554._0_8_ = 0x3d2aa9c13d2aa9c1;
      auVar1554._12_4_ = 0x3d2aa9c1;
      auVar1608._8_4_ = 0x3e2aaaaa;
      auVar1608._0_8_ = 0x3e2aaaaa3e2aaaaa;
      auVar1608._12_4_ = 0x3e2aaaaa;
      auVar1662._8_4_ = 0x3f800000;
      auVar1662._0_8_ = 0x3f8000003f800000;
      auVar1662._12_4_ = 0x3f800000;
      uVar872 = uVar422;
      do {
        auVar1716._0_4_ =
             (float)((uint)bVar11 * auVar462._0_4_ | (uint)!bVar11 * auVar492._0_4_) *
             *(float *)*(undefined1 (*) [64])ptr;
        auVar1716._4_4_ =
             (float)((uint)bVar12 * auVar462._4_4_ | (uint)!bVar12 * auVar492._4_4_) *
             *(float *)(*(undefined1 (*) [64])ptr + 4);
        auVar1716._8_4_ =
             (float)((uint)bVar13 * auVar462._8_4_ | (uint)!bVar13 * auVar492._8_4_) *
             *(float *)(*(undefined1 (*) [64])ptr + 8);
        auVar1716._12_4_ =
             (float)((uint)bVar14 * auVar462._12_4_ | (uint)!bVar14 * auVar492._12_4_) *
             *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        auVar493 = vminps_avx(auVar1716,auVar1026);
        auVar493 = vmaxps_avx(auVar493,auVar1103);
        auVar516 = vfmadd231ps_fma(auVar1159,auVar493,auVar1210);
        auVar504 = vcvttps2dq_avx512vl(auVar516);
        auVar504 = vcvtdq2ps_avx512vl(auVar504);
        uVar46 = vcmpps_avx512vl(auVar516,auVar504,1);
        auVar516 = vaddps_avx512vl(auVar504,auVar940);
        bVar15 = (bool)((byte)uVar46 & 1);
        auVar507._0_4_ = (uint)bVar15 * auVar516._0_4_ | (uint)!bVar15 * auVar504._0_4_;
        bVar15 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar507._4_4_ = (uint)bVar15 * auVar516._4_4_ | (uint)!bVar15 * auVar504._4_4_;
        bVar15 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar507._8_4_ = (uint)bVar15 * auVar516._8_4_ | (uint)!bVar15 * auVar504._8_4_;
        bVar15 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar507._12_4_ = (uint)bVar15 * auVar516._12_4_ | (uint)!bVar15 * auVar504._12_4_;
        auVar493 = vfmsub231ps_avx512vl(auVar493,auVar507,auVar1275);
        auVar516 = vfmsub231ps_avx512vl(auVar493,auVar507,auVar1336);
        auVar493 = vfmadd213ps_fma(auVar1392,auVar516,auVar1446);
        auVar504 = vmulps_avx512vl(auVar516,auVar516);
        auVar493 = vfmadd213ps_fma(auVar493,auVar516,auVar1500);
        auVar493 = vfmadd213ps_fma(auVar493,auVar516,auVar1554);
        auVar493 = vfmadd213ps_fma(auVar493,auVar516,auVar1608);
        auVar493 = vfmadd213ps_fma(auVar493,auVar516,auVar1159);
        auVar516 = vfmadd213ps_avx512vl(auVar493,auVar504,auVar516);
        auVar493 = vcvttps2dq_avx512vl(auVar507);
        auVar493 = vpslld_avx(auVar493,0x17);
        auVar493 = vpaddd_avx(auVar493,auVar1662);
        auVar493 = vfmadd213ps_fma(auVar493,auVar516,auVar493);
        *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar493;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        uVar422 = uVar872 + 4;
        iVar421 = uVar872 + 7;
        uVar872 = uVar422;
      } while (iVar421 < (int)uVar424);
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      return;
    }
    lVar425 = 0;
    do {
      auVar559._0_4_ = powf(auVar917._0_4_,*(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4));
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar559._0_4_;
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  case 10:
    uVar422 = bw;
    if (bw < aw) {
      uVar422 = aw;
    }
    iVar421 = bp;
    if (bp < ap) {
      iVar421 = ap;
    }
    uVar424 = iVar421 * uVar422;
    if (ap != bp) {
LAB_003a3d25:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (0 < (int)uVar422 && iVar421 == 0x10) {
          auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar1755 = ZEXT864(0);
          auVar713 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar725 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar726 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar730 = in_ZMM21;
          uVar424 = uVar422;
          do {
            auVar845 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar732 = *(undefined1 (*) [64])ptr;
            auVar462 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar845._0_16_);
            auVar729 = vbroadcastss_avx512f(auVar462);
            in_ZMM19 = vmulps_avx512f(auVar732,auVar729);
            uVar46 = vcmpps_avx512f(auVar732,auVar1755,1);
            auVar729 = vandps_avx512dq(in_ZMM19,auVar714);
            auVar345._8_4_ = 0xc0490fdb;
            auVar345._0_8_ = 0xc0490fdbc0490fdb;
            auVar345._12_4_ = 0xc0490fdb;
            auVar345._16_4_ = 0xc0490fdb;
            auVar345._20_4_ = 0xc0490fdb;
            auVar345._24_4_ = 0xc0490fdb;
            auVar345._28_4_ = 0xc0490fdb;
            auVar345._32_4_ = 0xc0490fdb;
            auVar345._36_4_ = 0xc0490fdb;
            auVar345._40_4_ = 0xc0490fdb;
            auVar345._44_4_ = 0xc0490fdb;
            auVar345._48_4_ = 0xc0490fdb;
            auVar345._52_4_ = 0xc0490fdb;
            auVar345._56_4_ = 0xc0490fdb;
            auVar345._60_4_ = 0xc0490fdb;
            auVar727 = vblendmps_avx512f(auVar713,auVar345);
            bVar11 = (bool)((byte)uVar46 & 1);
            in_ZMM21._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar730._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            in_ZMM21._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar730._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            in_ZMM21._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar730._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            in_ZMM21._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar730._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            in_ZMM21._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar730._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            in_ZMM21._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar730._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            in_ZMM21._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar730._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            in_ZMM21._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar730._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            in_ZMM21._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar730._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            in_ZMM21._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar730._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            in_ZMM21._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar730._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            in_ZMM21._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar730._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            in_ZMM21._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar730._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            in_ZMM21._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar730._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            in_ZMM21._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar730._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            in_ZMM21._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar730._60_4_;
            uVar46 = vcmpps_avx512f(auVar715,auVar729,1);
            auVar346._8_4_ = 0xbf800000;
            auVar346._0_8_ = 0xbf800000bf800000;
            auVar346._12_4_ = 0xbf800000;
            auVar346._16_4_ = 0xbf800000;
            auVar346._20_4_ = 0xbf800000;
            auVar346._24_4_ = 0xbf800000;
            auVar346._28_4_ = 0xbf800000;
            auVar346._32_4_ = 0xbf800000;
            auVar346._36_4_ = 0xbf800000;
            auVar346._40_4_ = 0xbf800000;
            auVar346._44_4_ = 0xbf800000;
            auVar346._48_4_ = 0xbf800000;
            auVar346._52_4_ = 0xbf800000;
            auVar346._56_4_ = 0xbf800000;
            auVar346._60_4_ = 0xbf800000;
            auVar730 = vblendmps_avx512f(auVar729,auVar346);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar790._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * in_ZMM22._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar790._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar790._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar790._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar790._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar790._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar790._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar790._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
            bVar28 = (byte)(uVar46 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar790._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * in_ZMM22._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar790._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * in_ZMM22._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar790._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * in_ZMM22._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar790._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * in_ZMM22._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar790._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * in_ZMM22._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar790._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * in_ZMM22._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar790._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * in_ZMM22._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar790._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * in_ZMM22._60_4_;
            auVar730 = vmaxps_avx512f(auVar729,auVar715);
            uVar426 = vcmpps_avx512f(auVar732,auVar1755,4);
            auVar730 = vdivps_avx512f(auVar790,auVar730);
            uVar427 = vcmpps_avx512f(auVar845,auVar1755,4);
            in_ZMM22 = vmulps_avx512f(auVar730,auVar730);
            auVar729 = vmulps_avx512f(in_ZMM22,in_ZMM22);
            auVar727 = vfmadd213ps_avx512f(auVar716,auVar729,auVar717);
            auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar718);
            auVar728 = vfmadd213ps_avx512f(auVar720,auVar729,auVar721);
            auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar719);
            auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar722);
            auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar723);
            auVar729 = vfmadd213ps_avx512f(auVar728,auVar729,auVar715);
            uVar428 = vcmpps_avx512f(auVar845,auVar1755,1);
            auVar729 = vfmadd231ps_avx512f(auVar729,in_ZMM22,auVar727);
            auVar730 = vmulps_avx512f(auVar729,auVar730);
            auVar729 = vaddps_avx512f(auVar730,auVar724);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar791._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar791._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar791._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar791._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar791._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar791._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar791._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar791._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar791._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar791._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar791._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar791._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar791._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar791._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar791._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar791._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
            auVar730 = vpternlogd_avx512f(auVar791,in_ZMM19,auVar712,0xf8);
            auVar729 = vaddps_avx512f(auVar730,in_ZMM21);
            bVar11 = (bool)((byte)uVar428 & 1);
            in_ZMM20._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
            bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
            in_ZMM20._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
            bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
            in_ZMM20._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
            bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
            in_ZMM20._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
            bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
            in_ZMM20._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
            bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
            in_ZMM20._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
            bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
            in_ZMM20._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
            bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
            in_ZMM20._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
            bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
            in_ZMM20._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
            bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
            in_ZMM20._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
            bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
            in_ZMM20._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
            in_ZMM20._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
            in_ZMM20._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
            in_ZMM20._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
            in_ZMM20._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
            bVar11 = SUB81(uVar428 >> 0xf,0);
            in_ZMM20._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
            auVar730 = vpternlogd_avx512f(auVar845,auVar712,auVar725,0xea);
            uVar46 = vcmpps_avx512f(auVar730,auVar1755,1);
            auVar730 = vpternlogd_avx512f(auVar732,auVar712,auVar726,0xea);
            bVar11 = (bool)((byte)uVar427 & 1);
            bVar13 = (bool)((byte)(uVar427 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar427 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar427 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar427 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar427 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar427 >> 6) & 1);
            bVar19 = (bool)((byte)(uVar427 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar427 >> 8) & 1);
            bVar21 = (bool)((byte)(uVar427 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar427 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar427 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar427 >> 0xc) & 1);
            bVar25 = (bool)((byte)(uVar427 >> 0xd) & 1);
            bVar26 = (bool)((byte)(uVar427 >> 0xe) & 1);
            bVar27 = SUB81(uVar427 >> 0xf,0);
            bVar12 = (bool)((byte)uVar426 & 1);
            auVar792._0_4_ =
                 (uint)bVar12 * (bVar11 * in_ZMM20._0_4_ | (uint)!bVar11 * auVar730._0_4_) |
                 (uint)!bVar12 * (uint)((byte)uVar46 & 1) * auVar713._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar792._4_4_ =
                 (uint)bVar11 * (bVar13 * in_ZMM20._4_4_ | (uint)!bVar13 * auVar730._4_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 1) & 1) * auVar713._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar792._8_4_ =
                 (uint)bVar11 * (bVar14 * in_ZMM20._8_4_ | (uint)!bVar14 * auVar730._8_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 2) & 1) * auVar713._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar792._12_4_ =
                 (uint)bVar11 * (bVar15 * in_ZMM20._12_4_ | (uint)!bVar15 * auVar730._12_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 3) & 1) * auVar713._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar792._16_4_ =
                 (uint)bVar11 * (bVar16 * in_ZMM20._16_4_ | (uint)!bVar16 * auVar730._16_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 4) & 1) * auVar713._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar792._20_4_ =
                 (uint)bVar11 * (bVar17 * in_ZMM20._20_4_ | (uint)!bVar17 * auVar730._20_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 5) & 1) * auVar713._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar792._24_4_ =
                 (uint)bVar11 * (bVar18 * in_ZMM20._24_4_ | (uint)!bVar18 * auVar730._24_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 6) & 1) * auVar713._24_4_;
            bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
            auVar792._28_4_ =
                 (uint)bVar11 * (bVar19 * in_ZMM20._28_4_ | (uint)!bVar19 * auVar730._28_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 7) & 1) * auVar713._28_4_;
            bVar11 = (bool)((byte)(uVar426 >> 8) & 1);
            auVar792._32_4_ =
                 (uint)bVar11 * (bVar20 * in_ZMM20._32_4_ | (uint)!bVar20 * auVar730._32_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 8) & 1) * auVar713._32_4_;
            bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
            auVar792._36_4_ =
                 (uint)bVar11 * (bVar21 * in_ZMM20._36_4_ | (uint)!bVar21 * auVar730._36_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 9) & 1) * auVar713._36_4_;
            bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
            auVar792._40_4_ =
                 (uint)bVar11 * (bVar22 * in_ZMM20._40_4_ | (uint)!bVar22 * auVar730._40_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 10) & 1) * auVar713._40_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
            auVar792._44_4_ =
                 (uint)bVar11 * (bVar23 * in_ZMM20._44_4_ | (uint)!bVar23 * auVar730._44_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xb) & 1) * auVar713._44_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
            auVar792._48_4_ =
                 (uint)bVar11 * (bVar24 * in_ZMM20._48_4_ | (uint)!bVar24 * auVar730._48_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xc) & 1) * auVar713._48_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
            auVar792._52_4_ =
                 (uint)bVar11 * (bVar25 * in_ZMM20._52_4_ | (uint)!bVar25 * auVar730._52_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xd) & 1) * auVar713._52_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
            auVar792._56_4_ =
                 (uint)bVar11 * (bVar26 * in_ZMM20._56_4_ | (uint)!bVar26 * auVar730._56_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xe) & 1) * auVar713._56_4_;
            bVar11 = SUB81(uVar426 >> 0xf,0);
            auVar792._60_4_ =
                 (uint)bVar11 * (bVar27 * in_ZMM20._60_4_ | (uint)!bVar27 * auVar730._60_4_) |
                 (uint)!bVar11 * (uint)(byte)(uVar46 >> 0xf) * auVar713._60_4_;
            *(undefined1 (*) [64])outptr = auVar792;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar424 = uVar424 - 1;
            auVar730 = in_ZMM21;
          } while (uVar424 != 0);
        }
        if (iVar421 == 8) {
          uVar424 = 0;
          if (1 < (int)uVar422) {
            iVar423 = 1;
            auVar1755 = ZEXT1664((undefined1  [16])0x0);
            auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar713 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar723 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar724 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar725 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            auVar726 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            auVar730 = in_ZMM20;
            do {
              auVar671 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar732 = *(undefined1 (*) [64])ptr;
              auVar672 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
              auVar845 = vinsertf64x4_avx512f(ZEXT3264(auVar671),auVar672,1);
              auVar729 = vdivps_avx512f(auVar732,auVar845);
              uVar46 = vcmpps_avx512f(auVar732,auVar1755,1);
              auVar727 = vandps_avx512dq(auVar729,auVar714);
              auVar347._8_4_ = 0xc0490fdb;
              auVar347._0_8_ = 0xc0490fdbc0490fdb;
              auVar347._12_4_ = 0xc0490fdb;
              auVar347._16_4_ = 0xc0490fdb;
              auVar347._20_4_ = 0xc0490fdb;
              auVar347._24_4_ = 0xc0490fdb;
              auVar347._28_4_ = 0xc0490fdb;
              auVar347._32_4_ = 0xc0490fdb;
              auVar347._36_4_ = 0xc0490fdb;
              auVar347._40_4_ = 0xc0490fdb;
              auVar347._44_4_ = 0xc0490fdb;
              auVar347._48_4_ = 0xc0490fdb;
              auVar347._52_4_ = 0xc0490fdb;
              auVar347._56_4_ = 0xc0490fdb;
              auVar347._60_4_ = 0xc0490fdb;
              auVar728 = vblendmps_avx512f(auVar713,auVar347);
              bVar11 = (bool)((byte)uVar46 & 1);
              in_ZMM20._0_4_ = (uint)bVar11 * auVar728._0_4_ | (uint)!bVar11 * auVar730._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              in_ZMM20._4_4_ = (uint)bVar11 * auVar728._4_4_ | (uint)!bVar11 * auVar730._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              in_ZMM20._8_4_ = (uint)bVar11 * auVar728._8_4_ | (uint)!bVar11 * auVar730._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              in_ZMM20._12_4_ = (uint)bVar11 * auVar728._12_4_ | (uint)!bVar11 * auVar730._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              in_ZMM20._16_4_ = (uint)bVar11 * auVar728._16_4_ | (uint)!bVar11 * auVar730._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              in_ZMM20._20_4_ = (uint)bVar11 * auVar728._20_4_ | (uint)!bVar11 * auVar730._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              in_ZMM20._24_4_ = (uint)bVar11 * auVar728._24_4_ | (uint)!bVar11 * auVar730._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              in_ZMM20._28_4_ = (uint)bVar11 * auVar728._28_4_ | (uint)!bVar11 * auVar730._28_4_;
              bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
              in_ZMM20._32_4_ = (uint)bVar11 * auVar728._32_4_ | (uint)!bVar11 * auVar730._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              in_ZMM20._36_4_ = (uint)bVar11 * auVar728._36_4_ | (uint)!bVar11 * auVar730._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              in_ZMM20._40_4_ = (uint)bVar11 * auVar728._40_4_ | (uint)!bVar11 * auVar730._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              in_ZMM20._44_4_ = (uint)bVar11 * auVar728._44_4_ | (uint)!bVar11 * auVar730._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              in_ZMM20._48_4_ = (uint)bVar11 * auVar728._48_4_ | (uint)!bVar11 * auVar730._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              in_ZMM20._52_4_ = (uint)bVar11 * auVar728._52_4_ | (uint)!bVar11 * auVar730._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              in_ZMM20._56_4_ = (uint)bVar11 * auVar728._56_4_ | (uint)!bVar11 * auVar730._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              in_ZMM20._60_4_ = (uint)bVar11 * auVar728._60_4_ | (uint)!bVar11 * auVar730._60_4_;
              uVar46 = vcmpps_avx512f(auVar715,auVar727,1);
              auVar348._8_4_ = 0xbf800000;
              auVar348._0_8_ = 0xbf800000bf800000;
              auVar348._12_4_ = 0xbf800000;
              auVar348._16_4_ = 0xbf800000;
              auVar348._20_4_ = 0xbf800000;
              auVar348._24_4_ = 0xbf800000;
              auVar348._28_4_ = 0xbf800000;
              auVar348._32_4_ = 0xbf800000;
              auVar348._36_4_ = 0xbf800000;
              auVar348._40_4_ = 0xbf800000;
              auVar348._44_4_ = 0xbf800000;
              auVar348._48_4_ = 0xbf800000;
              auVar348._52_4_ = 0xbf800000;
              auVar348._56_4_ = 0xbf800000;
              auVar348._60_4_ = 0xbf800000;
              auVar730 = vblendmps_avx512f(auVar727,auVar348);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar793._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar793._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar793._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar793._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar793._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar793._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar793._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              auVar793._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
              bVar28 = (byte)(uVar46 >> 8);
              bVar11 = (bool)(bVar28 & 1);
              auVar793._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * in_ZMM21._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              auVar793._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * in_ZMM21._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              auVar793._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * in_ZMM21._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              auVar793._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * in_ZMM21._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              auVar793._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * in_ZMM21._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              auVar793._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * in_ZMM21._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              auVar793._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * in_ZMM21._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              auVar793._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * in_ZMM21._60_4_;
              auVar730 = vmaxps_avx512f(auVar727,auVar715);
              auVar730 = vdivps_avx512f(auVar793,auVar730);
              uVar426 = vcmpps_avx512f(auVar732,auVar1755,4);
              in_ZMM21 = vmulps_avx512f(auVar730,auVar730);
              uVar427 = vcmpps_avx512f(auVar845,auVar1755,4);
              in_ZMM22 = vmulps_avx512f(in_ZMM21,in_ZMM21);
              auVar727 = vfmadd213ps_avx512f(auVar716,in_ZMM22,auVar717);
              auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar718);
              auVar728 = vfmadd213ps_avx512f(auVar720,in_ZMM22,auVar721);
              auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM22,auVar722);
              auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar719);
              auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM22,auVar723);
              auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM22,auVar715);
              auVar727 = vfmadd231ps_avx512f(auVar728,in_ZMM21,auVar727);
              uVar428 = vcmpps_avx512f(auVar845,auVar1755,1);
              auVar730 = vmulps_avx512f(auVar727,auVar730);
              auVar727 = vaddps_avx512f(auVar730,auVar724);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar794._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar730._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar794._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar730._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar794._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar730._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar794._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar730._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar794._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar730._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar794._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar730._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar794._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar730._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              auVar794._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar730._28_4_;
              bVar11 = (bool)(bVar28 & 1);
              auVar794._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar730._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              auVar794._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar730._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              auVar794._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar730._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              auVar794._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar730._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              auVar794._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar730._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              auVar794._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar730._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              auVar794._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar730._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              auVar794._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar730._60_4_;
              auVar730 = vpternlogd_avx512f(auVar794,auVar729,auVar712,0xf8);
              auVar729 = vaddps_avx512f(auVar730,in_ZMM20);
              bVar11 = (bool)((byte)uVar428 & 1);
              in_ZMM19._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
              bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
              in_ZMM19._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
              bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
              in_ZMM19._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
              bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
              in_ZMM19._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
              bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
              in_ZMM19._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
              bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
              in_ZMM19._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
              bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
              in_ZMM19._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
              bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
              in_ZMM19._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
              bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
              in_ZMM19._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
              bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
              in_ZMM19._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
              bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
              in_ZMM19._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
              bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
              in_ZMM19._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
              bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
              in_ZMM19._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
              bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
              in_ZMM19._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
              bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
              in_ZMM19._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
              bVar11 = SUB81(uVar428 >> 0xf,0);
              in_ZMM19._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
              auVar730 = vpternlogd_avx512f(auVar845,auVar712,auVar725,0xea);
              uVar46 = vcmpps_avx512f(auVar730,auVar1755,1);
              auVar730 = vpternlogd_avx512f(auVar732,auVar712,auVar726,0xea);
              bVar11 = (bool)((byte)uVar427 & 1);
              bVar13 = (bool)((byte)(uVar427 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar427 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar427 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar427 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar427 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar427 >> 6) & 1);
              bVar19 = (bool)((byte)(uVar427 >> 7) & 1);
              bVar20 = (bool)((byte)(uVar427 >> 8) & 1);
              bVar21 = (bool)((byte)(uVar427 >> 9) & 1);
              bVar22 = (bool)((byte)(uVar427 >> 10) & 1);
              bVar23 = (bool)((byte)(uVar427 >> 0xb) & 1);
              bVar24 = (bool)((byte)(uVar427 >> 0xc) & 1);
              bVar25 = (bool)((byte)(uVar427 >> 0xd) & 1);
              bVar26 = (bool)((byte)(uVar427 >> 0xe) & 1);
              bVar27 = SUB81(uVar427 >> 0xf,0);
              bVar12 = (bool)((byte)uVar426 & 1);
              auVar795._0_4_ =
                   (uint)bVar12 * (bVar11 * in_ZMM19._0_4_ | (uint)!bVar11 * auVar730._0_4_) |
                   (uint)!bVar12 * (uint)((byte)uVar46 & 1) * auVar713._0_4_;
              bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
              auVar795._4_4_ =
                   (uint)bVar11 * (bVar13 * in_ZMM19._4_4_ | (uint)!bVar13 * auVar730._4_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 1) & 1) * auVar713._4_4_;
              bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
              auVar795._8_4_ =
                   (uint)bVar11 * (bVar14 * in_ZMM19._8_4_ | (uint)!bVar14 * auVar730._8_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 2) & 1) * auVar713._8_4_;
              bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
              auVar795._12_4_ =
                   (uint)bVar11 * (bVar15 * in_ZMM19._12_4_ | (uint)!bVar15 * auVar730._12_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 3) & 1) * auVar713._12_4_;
              bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
              auVar795._16_4_ =
                   (uint)bVar11 * (bVar16 * in_ZMM19._16_4_ | (uint)!bVar16 * auVar730._16_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 4) & 1) * auVar713._16_4_;
              bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
              auVar795._20_4_ =
                   (uint)bVar11 * (bVar17 * in_ZMM19._20_4_ | (uint)!bVar17 * auVar730._20_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 5) & 1) * auVar713._20_4_;
              bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
              auVar795._24_4_ =
                   (uint)bVar11 * (bVar18 * in_ZMM19._24_4_ | (uint)!bVar18 * auVar730._24_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 6) & 1) * auVar713._24_4_;
              bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
              auVar795._28_4_ =
                   (uint)bVar11 * (bVar19 * in_ZMM19._28_4_ | (uint)!bVar19 * auVar730._28_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 7) & 1) * auVar713._28_4_;
              bVar11 = (bool)((byte)(uVar426 >> 8) & 1);
              auVar795._32_4_ =
                   (uint)bVar11 * (bVar20 * in_ZMM19._32_4_ | (uint)!bVar20 * auVar730._32_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 8) & 1) * auVar713._32_4_;
              bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
              auVar795._36_4_ =
                   (uint)bVar11 * (bVar21 * in_ZMM19._36_4_ | (uint)!bVar21 * auVar730._36_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 9) & 1) * auVar713._36_4_;
              bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
              auVar795._40_4_ =
                   (uint)bVar11 * (bVar22 * in_ZMM19._40_4_ | (uint)!bVar22 * auVar730._40_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 10) & 1) * auVar713._40_4_;
              bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
              auVar795._44_4_ =
                   (uint)bVar11 * (bVar23 * in_ZMM19._44_4_ | (uint)!bVar23 * auVar730._44_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xb) & 1) * auVar713._44_4_;
              bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
              auVar795._48_4_ =
                   (uint)bVar11 * (bVar24 * in_ZMM19._48_4_ | (uint)!bVar24 * auVar730._48_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xc) & 1) * auVar713._48_4_;
              bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
              auVar795._52_4_ =
                   (uint)bVar11 * (bVar25 * in_ZMM19._52_4_ | (uint)!bVar25 * auVar730._52_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xd) & 1) * auVar713._52_4_;
              bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
              auVar795._56_4_ =
                   (uint)bVar11 * (bVar26 * in_ZMM19._56_4_ | (uint)!bVar26 * auVar730._56_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xe) & 1) * auVar713._56_4_;
              bVar11 = SUB81(uVar426 >> 0xf,0);
              auVar795._60_4_ =
                   (uint)bVar11 * (bVar27 * in_ZMM19._60_4_ | (uint)!bVar27 * auVar730._60_4_) |
                   (uint)!bVar11 * (uint)(byte)(uVar46 >> 0xf) * auVar713._60_4_;
              ptr = (float *)((long)ptr + 0x40);
              *(undefined1 (*) [64])outptr = auVar795;
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar423 = iVar423 + 2;
              auVar730 = in_ZMM20;
            } while (iVar423 < (int)uVar422);
            uVar424 = uVar422 & 0x7ffffffe;
          }
          iVar423 = uVar422 - uVar424;
          if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
            auVar905._8_4_ = 0x80000000;
            auVar905._0_8_ = 0x8000000080000000;
            auVar905._12_4_ = 0x80000000;
            auVar905._16_4_ = 0x80000000;
            auVar905._20_4_ = 0x80000000;
            auVar905._24_4_ = 0x80000000;
            auVar905._28_4_ = 0x80000000;
            auVar980._8_4_ = 0x40490fdb;
            auVar980._0_8_ = 0x40490fdb40490fdb;
            auVar980._12_4_ = 0x40490fdb;
            auVar980._16_4_ = 0x40490fdb;
            auVar980._20_4_ = 0x40490fdb;
            auVar980._24_4_ = 0x40490fdb;
            auVar980._28_4_ = 0x40490fdb;
            auVar462 = ZEXT816(0) << 0x40;
            auVar1181._8_4_ = 0x7fffffff;
            auVar1181._0_8_ = 0x7fffffff7fffffff;
            auVar1181._12_4_ = 0x7fffffff;
            auVar1181._16_4_ = 0x7fffffff;
            auVar1181._20_4_ = 0x7fffffff;
            auVar1181._24_4_ = 0x7fffffff;
            auVar1181._28_4_ = 0x7fffffff;
            auVar1238._8_4_ = 0x3f800000;
            auVar1238._0_8_ = 0x3f8000003f800000;
            auVar1238._12_4_ = 0x3f800000;
            auVar1238._16_4_ = 0x3f800000;
            auVar1238._20_4_ = 0x3f800000;
            auVar1238._24_4_ = 0x3f800000;
            auVar1238._28_4_ = 0x3f800000;
            auVar1299._8_4_ = 0xbc83a25c;
            auVar1299._0_8_ = 0xbc83a25cbc83a25c;
            auVar1299._12_4_ = 0xbc83a25c;
            auVar1299._16_4_ = 0xbc83a25c;
            auVar1299._20_4_ = 0xbc83a25c;
            auVar1299._24_4_ = 0xbc83a25c;
            auVar1299._28_4_ = 0xbc83a25c;
            auVar1357._8_4_ = 0xbd99b01e;
            auVar1357._0_8_ = 0xbd99b01ebd99b01e;
            auVar1357._12_4_ = 0xbd99b01e;
            auVar1357._16_4_ = 0xbd99b01e;
            auVar1357._20_4_ = 0xbd99b01e;
            auVar1357._24_4_ = 0xbd99b01e;
            auVar1357._28_4_ = 0xbd99b01e;
            auVar1413._8_4_ = 0xbe117200;
            auVar1413._0_8_ = 0xbe117200be117200;
            auVar1413._12_4_ = 0xbe117200;
            auVar1413._16_4_ = 0xbe117200;
            auVar1413._20_4_ = 0xbe117200;
            auVar1413._24_4_ = 0xbe117200;
            auVar1413._28_4_ = 0xbe117200;
            auVar1467._8_4_ = 0xbeaaaa53;
            auVar1467._0_8_ = 0xbeaaaa53beaaaa53;
            auVar1467._12_4_ = 0xbeaaaa53;
            auVar1467._16_4_ = 0xbeaaaa53;
            auVar1467._20_4_ = 0xbeaaaa53;
            auVar1467._24_4_ = 0xbeaaaa53;
            auVar1467._28_4_ = 0xbeaaaa53;
            auVar1521._8_4_ = 0x3b3ac537;
            auVar1521._0_8_ = 0x3b3ac5373b3ac537;
            auVar1521._12_4_ = 0x3b3ac537;
            auVar1521._16_4_ = 0x3b3ac537;
            auVar1521._20_4_ = 0x3b3ac537;
            auVar1521._24_4_ = 0x3b3ac537;
            auVar1521._28_4_ = 0x3b3ac537;
            auVar1575._8_4_ = 0x3d2edd4e;
            auVar1575._0_8_ = 0x3d2edd4e3d2edd4e;
            auVar1575._12_4_ = 0x3d2edd4e;
            auVar1575._16_4_ = 0x3d2edd4e;
            auVar1575._20_4_ = 0x3d2edd4e;
            auVar1575._24_4_ = 0x3d2edd4e;
            auVar1575._28_4_ = 0x3d2edd4e;
            auVar1629._8_4_ = 0x3dd9ed24;
            auVar1629._0_8_ = 0x3dd9ed243dd9ed24;
            auVar1629._12_4_ = 0x3dd9ed24;
            auVar1629._16_4_ = 0x3dd9ed24;
            auVar1629._20_4_ = 0x3dd9ed24;
            auVar1629._24_4_ = 0x3dd9ed24;
            auVar1629._28_4_ = 0x3dd9ed24;
            auVar1683._8_4_ = 0x3e4cb974;
            auVar1683._0_8_ = 0x3e4cb9743e4cb974;
            auVar1683._12_4_ = 0x3e4cb974;
            auVar1683._16_4_ = 0x3e4cb974;
            auVar1683._20_4_ = 0x3e4cb974;
            auVar1683._24_4_ = 0x3e4cb974;
            auVar1683._28_4_ = 0x3e4cb974;
            auVar1735._8_4_ = 0x3fc90fdb;
            auVar1735._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar1735._12_4_ = 0x3fc90fdb;
            auVar1735._16_4_ = 0x3fc90fdb;
            auVar1735._20_4_ = 0x3fc90fdb;
            auVar1735._24_4_ = 0x3fc90fdb;
            auVar1735._28_4_ = 0x3fc90fdb;
            auVar1786._8_4_ = 0x40490fdb;
            auVar1786._0_8_ = 0x40490fdb40490fdb;
            auVar1786._12_4_ = 0x40490fdb;
            auVar1786._16_4_ = 0x40490fdb;
            auVar1786._20_4_ = 0x40490fdb;
            auVar1786._24_4_ = 0x40490fdb;
            auVar1786._28_4_ = 0x40490fdb;
            auVar671 = vpbroadcastd_avx512vl(ZEXT416(0x3fc90fdb));
            do {
              auVar675 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar672 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
              auVar492 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar675._0_16_);
              auVar684 = vbroadcastss_avx512vl(auVar492);
              auVar684 = vmulps_avx512vl(auVar672,auVar684);
              in_ZMM19 = ZEXT3264(auVar684);
              uVar46 = vcmpps_avx512vl(auVar672,ZEXT1632(auVar462),1);
              vandps_avx512vl(auVar684,auVar1181);
              auVar190._8_4_ = 0xc0490fdb;
              auVar190._0_8_ = 0xc0490fdbc0490fdb;
              auVar190._12_4_ = 0xc0490fdb;
              auVar190._16_4_ = 0xc0490fdb;
              auVar190._20_4_ = 0xc0490fdb;
              auVar190._24_4_ = 0xc0490fdb;
              auVar190._28_4_ = 0xc0490fdb;
              auVar676 = vblendmps_avx512vl(auVar980,auVar190);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar609._0_4_ = (uint)bVar11 * auVar676._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar609._4_4_ = (uint)bVar11 * auVar676._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar609._8_4_ = (uint)bVar11 * auVar676._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar609._12_4_ = (uint)bVar11 * auVar676._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar609._16_4_ = (uint)bVar11 * auVar676._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar609._20_4_ = (uint)bVar11 * auVar676._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar609._24_4_ = (uint)bVar11 * auVar676._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar609._28_4_ = (uint)bVar11 * auVar676._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
              in_ZMM21 = ZEXT3264(auVar609);
              uVar46 = vcmpps_avx512vl(auVar1238,auVar684,1);
              auVar191._8_4_ = 0xbf800000;
              auVar191._0_8_ = 0xbf800000bf800000;
              auVar191._12_4_ = 0xbf800000;
              auVar191._16_4_ = 0xbf800000;
              auVar191._20_4_ = 0xbf800000;
              auVar191._24_4_ = 0xbf800000;
              auVar191._28_4_ = 0xbf800000;
              auVar676 = vblendmps_avx512vl(auVar684,auVar191);
              bVar28 = (byte)uVar46;
              auVar610._0_4_ =
                   (uint)(bVar28 & 1) * auVar676._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar610._4_4_ = (uint)bVar11 * auVar676._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar610._8_4_ = (uint)bVar11 * auVar676._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar610._12_4_ = (uint)bVar11 * auVar676._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar610._16_4_ = (uint)bVar11 * auVar676._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar610._20_4_ = (uint)bVar11 * auVar676._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar610._24_4_ = (uint)bVar11 * auVar676._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar610._28_4_ = (uint)bVar11 * auVar676._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
              auVar676 = vdivps_avx512vl(auVar610,auVar684);
              auVar611._0_4_ =
                   (uint)(bVar28 & 1) * auVar676._0_4_ | !(bool)(bVar28 & 1) * auVar610._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar611._4_4_ = (uint)bVar11 * auVar676._4_4_ | !bVar11 * auVar610._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar611._8_4_ = (uint)bVar11 * auVar676._8_4_ | !bVar11 * auVar610._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar611._12_4_ = (uint)bVar11 * auVar676._12_4_ | !bVar11 * auVar610._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar611._16_4_ = (uint)bVar11 * auVar676._16_4_ | !bVar11 * auVar610._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar611._20_4_ = (uint)bVar11 * auVar676._20_4_ | !bVar11 * auVar610._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar611._24_4_ = (uint)bVar11 * auVar676._24_4_ | !bVar11 * auVar610._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar611._28_4_ = (uint)bVar11 * auVar676._28_4_ | !bVar11 * auVar610._28_4_;
              in_ZMM22 = ZEXT3264(auVar611);
              uVar426 = vcmpps_avx512vl(auVar672,ZEXT1632(auVar462),4);
              auVar676 = vmulps_avx512vl(auVar611,auVar611);
              auVar677 = vmulps_avx512vl(auVar676,auVar676);
              auVar682 = ZEXT1632(auVar462);
              uVar427 = vcmpps_avx512vl(auVar675,auVar682,1);
              auVar680 = vfmadd213ps_avx512vl(auVar1299,auVar677,auVar1357);
              auVar680 = vfmadd213ps_avx512vl(auVar680,auVar677,auVar1413);
              auVar681 = vfmadd213ps_avx512vl(auVar1521,auVar677,auVar1575);
              auVar681 = vfmadd213ps_avx512vl(auVar681,auVar677,auVar1629);
              auVar681 = vfmadd213ps_avx512vl(auVar681,auVar677,auVar1683);
              auVar680 = vfmadd213ps_avx512vl(auVar680,auVar677,auVar1467);
              auVar677 = vfmadd213ps_avx512vl(auVar681,auVar677,auVar1238);
              auVar676 = vfmadd231ps_avx512vl(auVar677,auVar676,auVar680);
              auVar676 = vmulps_avx512vl(auVar676,auVar611);
              uVar428 = vcmpps_avx512vl(auVar675,auVar682,4);
              uVar428 = uVar426 & uVar428;
              auVar677 = vaddps_avx512vl(auVar676,auVar1735);
              auVar612._0_4_ =
                   (uint)(bVar28 & 1) * auVar677._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar676._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar612._4_4_ = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * auVar676._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar612._8_4_ = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * auVar676._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar612._12_4_ = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * auVar676._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar612._16_4_ = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * auVar676._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar612._20_4_ = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * auVar676._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar612._24_4_ = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * auVar676._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar612._28_4_ = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * auVar676._28_4_;
              auVar675 = vpternlogd_avx512vl(auVar675,auVar1786,auVar905,0xec);
              uVar45 = vcmpps_avx512vl(auVar682,auVar675,2);
              auVar675 = vpternlogd_avx512vl(auVar612,auVar684,auVar905,0xf8);
              bVar28 = ~((byte)uVar426 | (byte)uVar45);
              auVar684 = vmovdqa32_avx512vl(auVar1786);
              iVar3 = (uint)(bVar28 & 1) * auVar684._0_4_;
              iVar2 = (uint)(bVar28 >> 1 & 1) * auVar684._4_4_;
              auVar613._4_4_ = iVar2;
              auVar613._0_4_ = iVar3;
              iVar1 = (uint)(bVar28 >> 2 & 1) * auVar684._8_4_;
              auVar613._8_4_ = iVar1;
              iVar6 = (uint)(bVar28 >> 3 & 1) * auVar684._12_4_;
              auVar613._12_4_ = iVar6;
              iVar7 = (uint)(bVar28 >> 4 & 1) * auVar684._16_4_;
              auVar613._16_4_ = iVar7;
              iVar8 = (uint)(bVar28 >> 5 & 1) * auVar684._20_4_;
              auVar613._20_4_ = iVar8;
              iVar4 = (uint)(bVar28 >> 6 & 1) * auVar684._24_4_;
              auVar613._24_4_ = iVar4;
              iVar5 = (uint)(bVar28 >> 7) * auVar684._28_4_;
              auVar613._28_4_ = iVar5;
              auVar684 = vaddps_avx512vl(auVar675,auVar609);
              bVar11 = (bool)((byte)uVar427 & 1);
              uVar424 = (uint)bVar11 * auVar684._0_4_ | (uint)!bVar11 * auVar675._0_4_;
              bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
              uVar872 = (uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * auVar675._4_4_;
              bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
              uVar873 = (uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * auVar675._8_4_;
              bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
              uVar874 = (uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * auVar675._12_4_;
              bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
              uVar875 = (uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * auVar675._16_4_;
              bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
              uVar876 = (uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * auVar675._20_4_;
              bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
              uVar877 = (uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * auVar675._24_4_;
              bVar11 = SUB81(uVar427 >> 7,0);
              uVar878 = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * auVar675._28_4_;
              in_ZMM20 = ZEXT3264(CONCAT428(uVar878,CONCAT424(uVar877,CONCAT420(uVar876,CONCAT416(
                                                  uVar875,CONCAT412(uVar874,CONCAT48(uVar873,
                                                  CONCAT44(uVar872,uVar424))))))));
              auVar672 = vpternlogd_avx512vl(auVar672,auVar613,auVar905,0xec);
              auVar672 = vpord_avx512vl(auVar672,auVar671);
              bVar11 = (bool)((byte)uVar426 & 1);
              bVar13 = (bool)((byte)(uVar426 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar426 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar426 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar426 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar426 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar426 >> 6) & 1);
              bVar19 = SUB81(uVar426 >> 7,0);
              bVar12 = (bool)((byte)uVar428 & 1);
              auVar614._0_4_ =
                   bVar12 * uVar424 |
                   (uint)!bVar12 * ((uint)bVar11 * auVar672._0_4_ | (uint)!bVar11 * iVar3);
              bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
              auVar614._4_4_ =
                   bVar11 * uVar872 |
                   (uint)!bVar11 * ((uint)bVar13 * auVar672._4_4_ | (uint)!bVar13 * iVar2);
              bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
              auVar614._8_4_ =
                   bVar11 * uVar873 |
                   (uint)!bVar11 * ((uint)bVar14 * auVar672._8_4_ | (uint)!bVar14 * iVar1);
              bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
              auVar614._12_4_ =
                   bVar11 * uVar874 |
                   (uint)!bVar11 * ((uint)bVar15 * auVar672._12_4_ | (uint)!bVar15 * iVar6);
              bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
              auVar614._16_4_ =
                   bVar11 * uVar875 |
                   (uint)!bVar11 * ((uint)bVar16 * auVar672._16_4_ | (uint)!bVar16 * iVar7);
              bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
              auVar614._20_4_ =
                   bVar11 * uVar876 |
                   (uint)!bVar11 * ((uint)bVar17 * auVar672._20_4_ | (uint)!bVar17 * iVar8);
              bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
              auVar614._24_4_ =
                   bVar11 * uVar877 |
                   (uint)!bVar11 * ((uint)bVar18 * auVar672._24_4_ | (uint)!bVar18 * iVar4);
              bVar11 = SUB81(uVar428 >> 7,0);
              auVar614._28_4_ =
                   bVar11 * uVar878 |
                   (uint)!bVar11 * ((uint)bVar19 * auVar672._28_4_ | (uint)!bVar19 * iVar5);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar614;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar423 = iVar423 + -1;
            } while (iVar423 != 0);
          }
        }
        if (iVar421 != 4) {
          return;
        }
        uVar424 = 0;
        if (3 < (int)uVar422) {
          iVar421 = 3;
          auVar1755 = ZEXT1664((undefined1  [16])0x0);
          auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar713 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar725 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar726 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar730 = in_ZMM20;
          do {
            auVar462 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
            auVar492 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
            auVar732 = *(undefined1 (*) [64])ptr;
            auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar671 = vinsertf32x4_avx512vl(ZEXT1632(auVar462),auVar492,1);
            auVar462 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar672 = vinsertf32x4_avx512vl(ZEXT1632(auVar493),auVar462,1);
            auVar845 = vinsertf64x4_avx512f(ZEXT3264(auVar672),auVar671,1);
            auVar729 = vdivps_avx512f(auVar732,auVar845);
            uVar46 = vcmpps_avx512f(auVar732,auVar1755,1);
            auVar727 = vandps_avx512dq(auVar729,auVar714);
            auVar349._8_4_ = 0xc0490fdb;
            auVar349._0_8_ = 0xc0490fdbc0490fdb;
            auVar349._12_4_ = 0xc0490fdb;
            auVar349._16_4_ = 0xc0490fdb;
            auVar349._20_4_ = 0xc0490fdb;
            auVar349._24_4_ = 0xc0490fdb;
            auVar349._28_4_ = 0xc0490fdb;
            auVar349._32_4_ = 0xc0490fdb;
            auVar349._36_4_ = 0xc0490fdb;
            auVar349._40_4_ = 0xc0490fdb;
            auVar349._44_4_ = 0xc0490fdb;
            auVar349._48_4_ = 0xc0490fdb;
            auVar349._52_4_ = 0xc0490fdb;
            auVar349._56_4_ = 0xc0490fdb;
            auVar349._60_4_ = 0xc0490fdb;
            auVar728 = vblendmps_avx512f(auVar713,auVar349);
            bVar11 = (bool)((byte)uVar46 & 1);
            in_ZMM20._0_4_ = (uint)bVar11 * auVar728._0_4_ | (uint)!bVar11 * auVar730._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            in_ZMM20._4_4_ = (uint)bVar11 * auVar728._4_4_ | (uint)!bVar11 * auVar730._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            in_ZMM20._8_4_ = (uint)bVar11 * auVar728._8_4_ | (uint)!bVar11 * auVar730._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            in_ZMM20._12_4_ = (uint)bVar11 * auVar728._12_4_ | (uint)!bVar11 * auVar730._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            in_ZMM20._16_4_ = (uint)bVar11 * auVar728._16_4_ | (uint)!bVar11 * auVar730._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            in_ZMM20._20_4_ = (uint)bVar11 * auVar728._20_4_ | (uint)!bVar11 * auVar730._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            in_ZMM20._24_4_ = (uint)bVar11 * auVar728._24_4_ | (uint)!bVar11 * auVar730._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            in_ZMM20._28_4_ = (uint)bVar11 * auVar728._28_4_ | (uint)!bVar11 * auVar730._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            in_ZMM20._32_4_ = (uint)bVar11 * auVar728._32_4_ | (uint)!bVar11 * auVar730._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            in_ZMM20._36_4_ = (uint)bVar11 * auVar728._36_4_ | (uint)!bVar11 * auVar730._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            in_ZMM20._40_4_ = (uint)bVar11 * auVar728._40_4_ | (uint)!bVar11 * auVar730._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            in_ZMM20._44_4_ = (uint)bVar11 * auVar728._44_4_ | (uint)!bVar11 * auVar730._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            in_ZMM20._48_4_ = (uint)bVar11 * auVar728._48_4_ | (uint)!bVar11 * auVar730._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            in_ZMM20._52_4_ = (uint)bVar11 * auVar728._52_4_ | (uint)!bVar11 * auVar730._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            in_ZMM20._56_4_ = (uint)bVar11 * auVar728._56_4_ | (uint)!bVar11 * auVar730._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            in_ZMM20._60_4_ = (uint)bVar11 * auVar728._60_4_ | (uint)!bVar11 * auVar730._60_4_;
            uVar46 = vcmpps_avx512f(auVar715,auVar727,1);
            auVar350._8_4_ = 0xbf800000;
            auVar350._0_8_ = 0xbf800000bf800000;
            auVar350._12_4_ = 0xbf800000;
            auVar350._16_4_ = 0xbf800000;
            auVar350._20_4_ = 0xbf800000;
            auVar350._24_4_ = 0xbf800000;
            auVar350._28_4_ = 0xbf800000;
            auVar350._32_4_ = 0xbf800000;
            auVar350._36_4_ = 0xbf800000;
            auVar350._40_4_ = 0xbf800000;
            auVar350._44_4_ = 0xbf800000;
            auVar350._48_4_ = 0xbf800000;
            auVar350._52_4_ = 0xbf800000;
            auVar350._56_4_ = 0xbf800000;
            auVar350._60_4_ = 0xbf800000;
            auVar730 = vblendmps_avx512f(auVar727,auVar350);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar796._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar796._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar796._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar796._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar796._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar796._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar796._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar796._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
            bVar28 = (byte)(uVar46 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar796._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * in_ZMM21._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar796._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * in_ZMM21._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar796._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * in_ZMM21._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar796._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * in_ZMM21._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar796._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * in_ZMM21._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar796._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * in_ZMM21._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar796._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * in_ZMM21._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar796._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * in_ZMM21._60_4_;
            auVar730 = vmaxps_avx512f(auVar727,auVar715);
            auVar730 = vdivps_avx512f(auVar796,auVar730);
            uVar426 = vcmpps_avx512f(auVar732,auVar1755,4);
            in_ZMM21 = vmulps_avx512f(auVar730,auVar730);
            uVar427 = vcmpps_avx512f(auVar845,auVar1755,4);
            in_ZMM22 = vmulps_avx512f(in_ZMM21,in_ZMM21);
            auVar727 = vfmadd213ps_avx512f(auVar716,in_ZMM22,auVar717);
            auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar718);
            auVar728 = vfmadd213ps_avx512f(auVar720,in_ZMM22,auVar721);
            auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM22,auVar722);
            auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar719);
            auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM22,auVar723);
            auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM22,auVar715);
            auVar727 = vfmadd231ps_avx512f(auVar728,in_ZMM21,auVar727);
            uVar428 = vcmpps_avx512f(auVar845,auVar1755,1);
            auVar730 = vmulps_avx512f(auVar727,auVar730);
            auVar727 = vaddps_avx512f(auVar730,auVar724);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar797._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar730._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar797._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar730._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar797._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar730._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar797._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar730._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar797._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar730._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar797._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar730._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar797._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar730._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar797._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar730._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar797._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar730._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar797._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar730._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar797._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar730._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar797._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar730._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar797._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar730._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar797._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar730._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar797._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar730._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar797._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar730._60_4_;
            auVar730 = vpternlogd_avx512f(auVar797,auVar729,auVar712,0xf8);
            auVar729 = vaddps_avx512f(auVar730,in_ZMM20);
            bVar11 = (bool)((byte)uVar428 & 1);
            in_ZMM19._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
            bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
            in_ZMM19._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
            bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
            in_ZMM19._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
            bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
            in_ZMM19._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
            bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
            in_ZMM19._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
            bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
            in_ZMM19._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
            bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
            in_ZMM19._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
            bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
            in_ZMM19._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
            bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
            in_ZMM19._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
            bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
            in_ZMM19._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
            bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
            in_ZMM19._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
            in_ZMM19._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
            in_ZMM19._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
            in_ZMM19._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
            in_ZMM19._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
            bVar11 = SUB81(uVar428 >> 0xf,0);
            in_ZMM19._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
            auVar730 = vpternlogd_avx512f(auVar845,auVar712,auVar725,0xea);
            uVar46 = vcmpps_avx512f(auVar730,auVar1755,1);
            auVar730 = vpternlogd_avx512f(auVar732,auVar712,auVar726,0xea);
            bVar11 = (bool)((byte)uVar427 & 1);
            bVar13 = (bool)((byte)(uVar427 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar427 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar427 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar427 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar427 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar427 >> 6) & 1);
            bVar19 = (bool)((byte)(uVar427 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar427 >> 8) & 1);
            bVar21 = (bool)((byte)(uVar427 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar427 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar427 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar427 >> 0xc) & 1);
            bVar25 = (bool)((byte)(uVar427 >> 0xd) & 1);
            bVar26 = (bool)((byte)(uVar427 >> 0xe) & 1);
            bVar27 = SUB81(uVar427 >> 0xf,0);
            bVar12 = (bool)((byte)uVar426 & 1);
            auVar798._0_4_ =
                 (uint)bVar12 * (bVar11 * in_ZMM19._0_4_ | (uint)!bVar11 * auVar730._0_4_) |
                 (uint)!bVar12 * (uint)((byte)uVar46 & 1) * auVar713._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar798._4_4_ =
                 (uint)bVar11 * (bVar13 * in_ZMM19._4_4_ | (uint)!bVar13 * auVar730._4_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 1) & 1) * auVar713._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar798._8_4_ =
                 (uint)bVar11 * (bVar14 * in_ZMM19._8_4_ | (uint)!bVar14 * auVar730._8_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 2) & 1) * auVar713._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar798._12_4_ =
                 (uint)bVar11 * (bVar15 * in_ZMM19._12_4_ | (uint)!bVar15 * auVar730._12_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 3) & 1) * auVar713._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar798._16_4_ =
                 (uint)bVar11 * (bVar16 * in_ZMM19._16_4_ | (uint)!bVar16 * auVar730._16_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 4) & 1) * auVar713._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar798._20_4_ =
                 (uint)bVar11 * (bVar17 * in_ZMM19._20_4_ | (uint)!bVar17 * auVar730._20_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 5) & 1) * auVar713._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar798._24_4_ =
                 (uint)bVar11 * (bVar18 * in_ZMM19._24_4_ | (uint)!bVar18 * auVar730._24_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 6) & 1) * auVar713._24_4_;
            bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
            auVar798._28_4_ =
                 (uint)bVar11 * (bVar19 * in_ZMM19._28_4_ | (uint)!bVar19 * auVar730._28_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 7) & 1) * auVar713._28_4_;
            bVar11 = (bool)((byte)(uVar426 >> 8) & 1);
            auVar798._32_4_ =
                 (uint)bVar11 * (bVar20 * in_ZMM19._32_4_ | (uint)!bVar20 * auVar730._32_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 8) & 1) * auVar713._32_4_;
            bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
            auVar798._36_4_ =
                 (uint)bVar11 * (bVar21 * in_ZMM19._36_4_ | (uint)!bVar21 * auVar730._36_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 9) & 1) * auVar713._36_4_;
            bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
            auVar798._40_4_ =
                 (uint)bVar11 * (bVar22 * in_ZMM19._40_4_ | (uint)!bVar22 * auVar730._40_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 10) & 1) * auVar713._40_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
            auVar798._44_4_ =
                 (uint)bVar11 * (bVar23 * in_ZMM19._44_4_ | (uint)!bVar23 * auVar730._44_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xb) & 1) * auVar713._44_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
            auVar798._48_4_ =
                 (uint)bVar11 * (bVar24 * in_ZMM19._48_4_ | (uint)!bVar24 * auVar730._48_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xc) & 1) * auVar713._48_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
            auVar798._52_4_ =
                 (uint)bVar11 * (bVar25 * in_ZMM19._52_4_ | (uint)!bVar25 * auVar730._52_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xd) & 1) * auVar713._52_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
            auVar798._56_4_ =
                 (uint)bVar11 * (bVar26 * in_ZMM19._56_4_ | (uint)!bVar26 * auVar730._56_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xe) & 1) * auVar713._56_4_;
            bVar11 = SUB81(uVar426 >> 0xf,0);
            auVar798._60_4_ =
                 (uint)bVar11 * (bVar27 * in_ZMM19._60_4_ | (uint)!bVar27 * auVar730._60_4_) |
                 (uint)!bVar11 * (uint)(byte)(uVar46 >> 0xf) * auVar713._60_4_;
            ptr = (float *)((long)ptr + 0x40);
            *(undefined1 (*) [64])outptr = auVar798;
            ptr1 = ptr1 + 4;
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 4;
            auVar730 = in_ZMM20;
          } while (iVar421 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffc;
        }
        if ((int)(uVar424 | 1) < (int)uVar422) {
          auVar462 = ZEXT816(0) << 0x40;
          auVar981._8_4_ = 0x80000000;
          auVar981._0_8_ = 0x8000000080000000;
          auVar981._12_4_ = 0x80000000;
          auVar981._16_4_ = 0x80000000;
          auVar981._20_4_ = 0x80000000;
          auVar981._24_4_ = 0x80000000;
          auVar981._28_4_ = 0x80000000;
          auVar1046._8_4_ = 0x40490fdb;
          auVar1046._0_8_ = 0x40490fdb40490fdb;
          auVar1046._12_4_ = 0x40490fdb;
          auVar1046._16_4_ = 0x40490fdb;
          auVar1046._20_4_ = 0x40490fdb;
          auVar1046._24_4_ = 0x40490fdb;
          auVar1046._28_4_ = 0x40490fdb;
          auVar1121._8_4_ = 0x7fffffff;
          auVar1121._0_8_ = 0x7fffffff7fffffff;
          auVar1121._12_4_ = 0x7fffffff;
          auVar1121._16_4_ = 0x7fffffff;
          auVar1121._20_4_ = 0x7fffffff;
          auVar1121._24_4_ = 0x7fffffff;
          auVar1121._28_4_ = 0x7fffffff;
          auVar1182._8_4_ = 0x3f800000;
          auVar1182._0_8_ = 0x3f8000003f800000;
          auVar1182._12_4_ = 0x3f800000;
          auVar1182._16_4_ = 0x3f800000;
          auVar1182._20_4_ = 0x3f800000;
          auVar1182._24_4_ = 0x3f800000;
          auVar1182._28_4_ = 0x3f800000;
          auVar1239._8_4_ = 0xbc83a25c;
          auVar1239._0_8_ = 0xbc83a25cbc83a25c;
          auVar1239._12_4_ = 0xbc83a25c;
          auVar1239._16_4_ = 0xbc83a25c;
          auVar1239._20_4_ = 0xbc83a25c;
          auVar1239._24_4_ = 0xbc83a25c;
          auVar1239._28_4_ = 0xbc83a25c;
          auVar1300._8_4_ = 0xbd99b01e;
          auVar1300._0_8_ = 0xbd99b01ebd99b01e;
          auVar1300._12_4_ = 0xbd99b01e;
          auVar1300._16_4_ = 0xbd99b01e;
          auVar1300._20_4_ = 0xbd99b01e;
          auVar1300._24_4_ = 0xbd99b01e;
          auVar1300._28_4_ = 0xbd99b01e;
          auVar1358._8_4_ = 0xbe117200;
          auVar1358._0_8_ = 0xbe117200be117200;
          auVar1358._12_4_ = 0xbe117200;
          auVar1358._16_4_ = 0xbe117200;
          auVar1358._20_4_ = 0xbe117200;
          auVar1358._24_4_ = 0xbe117200;
          auVar1358._28_4_ = 0xbe117200;
          auVar1414._8_4_ = 0xbeaaaa53;
          auVar1414._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1414._12_4_ = 0xbeaaaa53;
          auVar1414._16_4_ = 0xbeaaaa53;
          auVar1414._20_4_ = 0xbeaaaa53;
          auVar1414._24_4_ = 0xbeaaaa53;
          auVar1414._28_4_ = 0xbeaaaa53;
          auVar1468._8_4_ = 0x3b3ac537;
          auVar1468._0_8_ = 0x3b3ac5373b3ac537;
          auVar1468._12_4_ = 0x3b3ac537;
          auVar1468._16_4_ = 0x3b3ac537;
          auVar1468._20_4_ = 0x3b3ac537;
          auVar1468._24_4_ = 0x3b3ac537;
          auVar1468._28_4_ = 0x3b3ac537;
          auVar1522._8_4_ = 0x3d2edd4e;
          auVar1522._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1522._12_4_ = 0x3d2edd4e;
          auVar1522._16_4_ = 0x3d2edd4e;
          auVar1522._20_4_ = 0x3d2edd4e;
          auVar1522._24_4_ = 0x3d2edd4e;
          auVar1522._28_4_ = 0x3d2edd4e;
          auVar1576._8_4_ = 0x3dd9ed24;
          auVar1576._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1576._12_4_ = 0x3dd9ed24;
          auVar1576._16_4_ = 0x3dd9ed24;
          auVar1576._20_4_ = 0x3dd9ed24;
          auVar1576._24_4_ = 0x3dd9ed24;
          auVar1576._28_4_ = 0x3dd9ed24;
          auVar1630._8_4_ = 0x3e4cb974;
          auVar1630._0_8_ = 0x3e4cb9743e4cb974;
          auVar1630._12_4_ = 0x3e4cb974;
          auVar1630._16_4_ = 0x3e4cb974;
          auVar1630._20_4_ = 0x3e4cb974;
          auVar1630._24_4_ = 0x3e4cb974;
          auVar1630._28_4_ = 0x3e4cb974;
          auVar1684._8_4_ = 0x3fc90fdb;
          auVar1684._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1684._12_4_ = 0x3fc90fdb;
          auVar1684._16_4_ = 0x3fc90fdb;
          auVar1684._20_4_ = 0x3fc90fdb;
          auVar1684._24_4_ = 0x3fc90fdb;
          auVar1684._28_4_ = 0x3fc90fdb;
          auVar1736._8_4_ = 0x40490fdb;
          auVar1736._0_8_ = 0x40490fdb40490fdb;
          auVar1736._12_4_ = 0x40490fdb;
          auVar1736._16_4_ = 0x40490fdb;
          auVar1736._20_4_ = 0x40490fdb;
          auVar1736._24_4_ = 0x40490fdb;
          auVar1736._28_4_ = 0x40490fdb;
          auVar1787._8_4_ = 0x3fc90fdb;
          auVar1787._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1787._12_4_ = 0x3fc90fdb;
          auVar1787._16_4_ = 0x3fc90fdb;
          auVar1787._20_4_ = 0x3fc90fdb;
          auVar1787._24_4_ = 0x3fc90fdb;
          auVar1787._28_4_ = 0x3fc90fdb;
          uVar872 = uVar424;
          do {
            auVar492 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar671 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
            auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar672 = vinsertf32x4_avx512vl(ZEXT1632(auVar492),auVar493,1);
            auVar675 = vdivps_avx512vl(auVar671,auVar672);
            uVar46 = vcmpps_avx512vl(auVar671,ZEXT1632(auVar462),1);
            vandps_avx512vl(auVar675,auVar1121);
            auVar192._8_4_ = 0xc0490fdb;
            auVar192._0_8_ = 0xc0490fdbc0490fdb;
            auVar192._12_4_ = 0xc0490fdb;
            auVar192._16_4_ = 0xc0490fdb;
            auVar192._20_4_ = 0xc0490fdb;
            auVar192._24_4_ = 0xc0490fdb;
            auVar192._28_4_ = 0xc0490fdb;
            auVar684 = vblendmps_avx512vl(auVar1046,auVar192);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar615._0_4_ = (uint)bVar11 * auVar684._0_4_ | (uint)!bVar11 * in_ZMM20._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar615._4_4_ = (uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * in_ZMM20._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar615._8_4_ = (uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * in_ZMM20._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar615._12_4_ = (uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * in_ZMM20._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar615._16_4_ = (uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * in_ZMM20._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar615._20_4_ = (uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * in_ZMM20._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar615._24_4_ = (uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * in_ZMM20._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar615._28_4_ = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * in_ZMM20._28_4_;
            in_ZMM20 = ZEXT3264(auVar615);
            uVar46 = vcmpps_avx512vl(auVar1182,auVar675,1);
            auVar193._8_4_ = 0xbf800000;
            auVar193._0_8_ = 0xbf800000bf800000;
            auVar193._12_4_ = 0xbf800000;
            auVar193._16_4_ = 0xbf800000;
            auVar193._20_4_ = 0xbf800000;
            auVar193._24_4_ = 0xbf800000;
            auVar193._28_4_ = 0xbf800000;
            auVar684 = vblendmps_avx512vl(auVar675,auVar193);
            bVar28 = (byte)uVar46;
            auVar616._0_4_ =
                 (uint)(bVar28 & 1) * auVar684._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar616._4_4_ = (uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar616._8_4_ = (uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar616._12_4_ = (uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar616._16_4_ = (uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar616._20_4_ = (uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar616._24_4_ = (uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar616._28_4_ = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
            auVar684 = vdivps_avx512vl(auVar616,auVar675);
            auVar617._0_4_ =
                 (uint)(bVar28 & 1) * auVar684._0_4_ | !(bool)(bVar28 & 1) * auVar616._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar617._4_4_ = (uint)bVar11 * auVar684._4_4_ | !bVar11 * auVar616._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar617._8_4_ = (uint)bVar11 * auVar684._8_4_ | !bVar11 * auVar616._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar617._12_4_ = (uint)bVar11 * auVar684._12_4_ | !bVar11 * auVar616._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar617._16_4_ = (uint)bVar11 * auVar684._16_4_ | !bVar11 * auVar616._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar617._20_4_ = (uint)bVar11 * auVar684._20_4_ | !bVar11 * auVar616._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar617._24_4_ = (uint)bVar11 * auVar684._24_4_ | !bVar11 * auVar616._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar617._28_4_ = (uint)bVar11 * auVar684._28_4_ | !bVar11 * auVar616._28_4_;
            in_ZMM21 = ZEXT3264(auVar617);
            uVar426 = vcmpps_avx512vl(auVar671,ZEXT1632(auVar462),4);
            auVar684 = vmulps_avx512vl(auVar617,auVar617);
            auVar681 = ZEXT1632(auVar462);
            uVar427 = vcmpps_avx512vl(auVar672,auVar681,1);
            auVar676 = vmulps_avx512vl(auVar684,auVar684);
            in_ZMM22 = ZEXT3264(auVar676);
            auVar677 = vfmadd213ps_avx512vl(auVar1239,auVar676,auVar1300);
            auVar677 = vfmadd213ps_avx512vl(auVar677,auVar676,auVar1358);
            auVar680 = vfmadd213ps_avx512vl(auVar1468,auVar676,auVar1522);
            auVar680 = vfmadd213ps_avx512vl(auVar680,auVar676,auVar1576);
            auVar677 = vfmadd213ps_avx512vl(auVar677,auVar676,auVar1414);
            auVar680 = vfmadd213ps_avx512vl(auVar680,auVar676,auVar1630);
            auVar676 = vfmadd213ps_avx512vl(auVar680,auVar676,auVar1182);
            auVar684 = vfmadd231ps_avx512vl(auVar676,auVar684,auVar677);
            uVar428 = vcmpps_avx512vl(auVar672,auVar681,4);
            uVar428 = uVar426 & uVar428;
            auVar684 = vmulps_avx512vl(auVar684,auVar617);
            auVar676 = vaddps_avx512vl(auVar684,auVar1684);
            auVar618._0_4_ =
                 (uint)(bVar28 & 1) * auVar676._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar684._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar618._4_4_ = (uint)bVar11 * auVar676._4_4_ | (uint)!bVar11 * auVar684._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar618._8_4_ = (uint)bVar11 * auVar676._8_4_ | (uint)!bVar11 * auVar684._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar618._12_4_ = (uint)bVar11 * auVar676._12_4_ | (uint)!bVar11 * auVar684._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar618._16_4_ = (uint)bVar11 * auVar676._16_4_ | (uint)!bVar11 * auVar684._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar618._20_4_ = (uint)bVar11 * auVar676._20_4_ | (uint)!bVar11 * auVar684._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar618._24_4_ = (uint)bVar11 * auVar676._24_4_ | (uint)!bVar11 * auVar684._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar618._28_4_ = (uint)bVar11 * auVar676._28_4_ | (uint)!bVar11 * auVar684._28_4_;
            auVar672 = vpternlogd_avx512vl(auVar672,auVar1736,auVar981,0xec);
            auVar675 = vpternlogd_avx512vl(auVar618,auVar675,auVar981,0xf8);
            uVar45 = vcmpps_avx512vl(auVar681,auVar672,2);
            bVar28 = ~((byte)uVar426 | (byte)uVar45);
            auVar672 = vaddps_avx512vl(auVar675,auVar615);
            bVar11 = (bool)((byte)uVar427 & 1);
            uVar424 = (uint)bVar11 * auVar672._0_4_ | (uint)!bVar11 * auVar675._0_4_;
            bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
            uVar873 = (uint)bVar11 * auVar672._4_4_ | (uint)!bVar11 * auVar675._4_4_;
            bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
            uVar874 = (uint)bVar11 * auVar672._8_4_ | (uint)!bVar11 * auVar675._8_4_;
            bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
            uVar875 = (uint)bVar11 * auVar672._12_4_ | (uint)!bVar11 * auVar675._12_4_;
            bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
            uVar876 = (uint)bVar11 * auVar672._16_4_ | (uint)!bVar11 * auVar675._16_4_;
            bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
            uVar877 = (uint)bVar11 * auVar672._20_4_ | (uint)!bVar11 * auVar675._20_4_;
            bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
            uVar878 = (uint)bVar11 * auVar672._24_4_ | (uint)!bVar11 * auVar675._24_4_;
            bVar11 = SUB81(uVar427 >> 7,0);
            uVar879 = (uint)bVar11 * auVar672._28_4_ | (uint)!bVar11 * auVar675._28_4_;
            in_ZMM19 = ZEXT3264(CONCAT428(uVar879,CONCAT424(uVar878,CONCAT420(uVar877,CONCAT416(
                                                  uVar876,CONCAT412(uVar875,CONCAT48(uVar874,
                                                  CONCAT44(uVar873,uVar424))))))));
            auVar672 = vmovdqa32_avx512vl(auVar1736);
            iVar5 = (uint)(bVar28 & 1) * auVar672._0_4_;
            iVar421 = (uint)(bVar28 >> 1 & 1) * auVar672._4_4_;
            auVar619._4_4_ = iVar421;
            auVar619._0_4_ = iVar5;
            iVar4 = (uint)(bVar28 >> 2 & 1) * auVar672._8_4_;
            auVar619._8_4_ = iVar4;
            iVar423 = (uint)(bVar28 >> 3 & 1) * auVar672._12_4_;
            auVar619._12_4_ = iVar423;
            iVar1 = (uint)(bVar28 >> 4 & 1) * auVar672._16_4_;
            auVar619._16_4_ = iVar1;
            iVar2 = (uint)(bVar28 >> 5 & 1) * auVar672._20_4_;
            auVar619._20_4_ = iVar2;
            iVar3 = (uint)(bVar28 >> 6 & 1) * auVar672._24_4_;
            auVar619._24_4_ = iVar3;
            iVar6 = (uint)(bVar28 >> 7) * auVar672._28_4_;
            auVar619._28_4_ = iVar6;
            auVar671 = vpternlogd_avx512vl(auVar671,auVar619,auVar981,0xec);
            auVar671 = vpord_avx512vl(auVar671,auVar1787);
            bVar11 = (bool)((byte)uVar426 & 1);
            bVar13 = (bool)((byte)(uVar426 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar426 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar426 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar426 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar426 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar426 >> 6) & 1);
            bVar19 = SUB81(uVar426 >> 7,0);
            bVar12 = (bool)((byte)uVar428 & 1);
            auVar620._0_4_ =
                 bVar12 * uVar424 |
                 (uint)!bVar12 * ((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * iVar5);
            bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
            auVar620._4_4_ =
                 bVar11 * uVar873 |
                 (uint)!bVar11 * ((uint)bVar13 * auVar671._4_4_ | (uint)!bVar13 * iVar421);
            bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
            auVar620._8_4_ =
                 bVar11 * uVar874 |
                 (uint)!bVar11 * ((uint)bVar14 * auVar671._8_4_ | (uint)!bVar14 * iVar4);
            bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
            auVar620._12_4_ =
                 bVar11 * uVar875 |
                 (uint)!bVar11 * ((uint)bVar15 * auVar671._12_4_ | (uint)!bVar15 * iVar423);
            bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
            auVar620._16_4_ =
                 bVar11 * uVar876 |
                 (uint)!bVar11 * ((uint)bVar16 * auVar671._16_4_ | (uint)!bVar16 * iVar1);
            bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
            auVar620._20_4_ =
                 bVar11 * uVar877 |
                 (uint)!bVar11 * ((uint)bVar17 * auVar671._20_4_ | (uint)!bVar17 * iVar2);
            bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
            auVar620._24_4_ =
                 bVar11 * uVar878 |
                 (uint)!bVar11 * ((uint)bVar18 * auVar671._24_4_ | (uint)!bVar18 * iVar3);
            bVar11 = SUB81(uVar428 >> 7,0);
            auVar620._28_4_ =
                 bVar11 * uVar879 |
                 (uint)!bVar11 * ((uint)bVar19 * auVar671._28_4_ | (uint)!bVar19 * iVar6);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar620;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar424 = uVar872 + 2;
            iVar421 = uVar872 + 3;
            uVar872 = uVar424;
          } while (iVar421 < (int)uVar422);
        }
        iVar421 = uVar422 - uVar424;
        if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
          return;
        }
        lVar425 = 0;
        auVar891._8_4_ = 0x80000000;
        auVar891._0_8_ = 0x8000000080000000;
        auVar891._12_4_ = 0x80000000;
        auVar938._8_4_ = 0x40490fdb;
        auVar938._0_8_ = 0x40490fdb40490fdb;
        auVar938._12_4_ = 0x40490fdb;
        auVar492 = ZEXT816(0) << 0x40;
        auVar1157._8_4_ = 0x7fffffff;
        auVar1157._0_8_ = 0x7fffffff7fffffff;
        auVar1157._12_4_ = 0x7fffffff;
        auVar1207._8_4_ = 0x3f800000;
        auVar1207._0_8_ = 0x3f8000003f800000;
        auVar1207._12_4_ = 0x3f800000;
        auVar1271._8_4_ = 0xbc83a25c;
        auVar1271._0_8_ = 0xbc83a25cbc83a25c;
        auVar1271._12_4_ = 0xbc83a25c;
        auVar1334._8_4_ = 0xbd99b01e;
        auVar1334._0_8_ = 0xbd99b01ebd99b01e;
        auVar1334._12_4_ = 0xbd99b01e;
        auVar1390._8_4_ = 0xbe117200;
        auVar1390._0_8_ = 0xbe117200be117200;
        auVar1390._12_4_ = 0xbe117200;
        auVar1444._8_4_ = 0xbeaaaa53;
        auVar1444._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1444._12_4_ = 0xbeaaaa53;
        auVar1498._8_4_ = 0x3b3ac537;
        auVar1498._0_8_ = 0x3b3ac5373b3ac537;
        auVar1498._12_4_ = 0x3b3ac537;
        auVar1552._8_4_ = 0x3d2edd4e;
        auVar1552._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1552._12_4_ = 0x3d2edd4e;
        auVar1606._8_4_ = 0x3dd9ed24;
        auVar1606._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1606._12_4_ = 0x3dd9ed24;
        auVar1660._8_4_ = 0x3e4cb974;
        auVar1660._0_8_ = 0x3e4cb9743e4cb974;
        auVar1660._12_4_ = 0x3e4cb974;
        auVar1714._8_4_ = 0x3fc90fdb;
        auVar1714._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1714._12_4_ = 0x3fc90fdb;
        auVar1767._8_4_ = 0x40490fdb;
        auVar1767._0_8_ = 0x40490fdb40490fdb;
        auVar1767._12_4_ = 0x40490fdb;
        auVar462 = vpbroadcastd_avx512vl(ZEXT416(0x3fc90fdb));
        do {
          auVar516 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + lVar425)));
          auVar493 = *(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4);
          uVar46 = vcmpps_avx512vl(auVar493,auVar492,4);
          uVar426 = vcmpps_avx512vl(auVar516,auVar492,4);
          uVar426 = uVar46 & uVar426;
          uVar427 = vcmpps_avx512vl(auVar516,auVar492,1);
          uVar428 = vcmpps_avx512vl(auVar493,auVar492,1);
          auVar66._8_4_ = 0xc0490fdb;
          auVar66._0_8_ = 0xc0490fdbc0490fdb;
          auVar66._12_4_ = 0xc0490fdb;
          auVar504 = vblendmps_avx512vl(auVar938,auVar66);
          bVar11 = (bool)((byte)uVar428 & 1);
          auVar487._0_4_ = (uint)bVar11 * auVar504._0_4_ | (uint)!bVar11 * in_ZMM19._0_4_;
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          auVar487._4_4_ = (uint)bVar11 * auVar504._4_4_ | (uint)!bVar11 * in_ZMM19._4_4_;
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          auVar487._8_4_ = (uint)bVar11 * auVar504._8_4_ | (uint)!bVar11 * in_ZMM19._8_4_;
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar487._12_4_ = (uint)bVar11 * auVar504._12_4_ | (uint)!bVar11 * in_ZMM19._12_4_;
          in_ZMM19 = ZEXT1664(auVar487);
          auVar504 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar516);
          auVar504 = vbroadcastss_avx512vl(auVar504);
          auVar504 = vmulps_avx512vl(auVar493,auVar504);
          auVar496 = vandps_avx512vl(auVar504,auVar1157);
          uVar428 = vcmpps_avx512vl(auVar1207,auVar496,1);
          auVar67._8_4_ = 0xbf800000;
          auVar67._0_8_ = 0xbf800000bf800000;
          auVar67._12_4_ = 0xbf800000;
          auVar497 = vblendmps_avx512vl(auVar496,auVar67);
          bVar28 = (byte)uVar428;
          auVar488._0_4_ =
               (uint)(bVar28 & 1) * auVar497._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          auVar488._4_4_ = (uint)bVar11 * auVar497._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          auVar488._8_4_ = (uint)bVar11 * auVar497._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar488._12_4_ = (uint)bVar11 * auVar497._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
          auVar496 = vdivps_avx512vl(auVar488,auVar496);
          auVar489._0_4_ =
               (uint)(bVar28 & 1) * auVar496._0_4_ | !(bool)(bVar28 & 1) * auVar488._0_4_;
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          auVar489._4_4_ = (uint)bVar11 * auVar496._4_4_ | !bVar11 * auVar488._4_4_;
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          auVar489._8_4_ = (uint)bVar11 * auVar496._8_4_ | !bVar11 * auVar488._8_4_;
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar489._12_4_ = (uint)bVar11 * auVar496._12_4_ | !bVar11 * auVar488._12_4_;
          in_ZMM22 = ZEXT1664(auVar489);
          auVar496 = vmulps_avx512vl(auVar489,auVar489);
          auVar497 = vmulps_avx512vl(auVar496,auVar496);
          auVar498 = vfmadd213ps_avx512vl(auVar1271,auVar497,auVar1334);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar497,auVar1390);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar497,auVar1444);
          auVar501 = vfmadd213ps_avx512vl(auVar1498,auVar497,auVar1552);
          auVar501 = vfmadd213ps_avx512vl(auVar501,auVar497,auVar1606);
          auVar501 = vfmadd213ps_avx512vl(auVar501,auVar497,auVar1660);
          auVar497 = vfmadd213ps_avx512vl(auVar501,auVar497,auVar1207);
          auVar496 = vfmadd231ps_avx512vl(auVar497,auVar496,auVar498);
          auVar496 = vmulps_avx512vl(auVar496,auVar489);
          auVar497 = vaddps_avx512vl(auVar496,auVar1714);
          auVar490._0_4_ =
               (uint)(bVar28 & 1) * auVar497._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar496._0_4_;
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          auVar490._4_4_ = (uint)bVar11 * auVar497._4_4_ | (uint)!bVar11 * auVar496._4_4_;
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          auVar490._8_4_ = (uint)bVar11 * auVar497._8_4_ | (uint)!bVar11 * auVar496._8_4_;
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar490._12_4_ = (uint)bVar11 * auVar497._12_4_ | (uint)!bVar11 * auVar496._12_4_;
          auVar504 = vpternlogd_avx512vl(auVar490,auVar504,auVar891,0xf8);
          auVar496 = vaddps_avx512vl(auVar504,auVar487);
          bVar11 = (bool)((byte)uVar427 & 1);
          bVar14 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar516 = vpternlogd_avx512vl(auVar516,auVar1767,auVar891,0xec);
          uVar45 = vcmpps_avx512vl(auVar492,auVar516,2);
          uVar47 = ~((ushort)uVar46 | (ushort)uVar45);
          auVar516 = vmovdqa32_avx512vl(auVar1767);
          iVar423 = (uint)((byte)uVar47 & 1) * auVar516._0_4_;
          iVar1 = (uint)((byte)(uVar47 >> 1) & 1) * auVar516._4_4_;
          auVar491._4_4_ = iVar1;
          auVar491._0_4_ = iVar423;
          iVar2 = (uint)((byte)(uVar47 >> 2) & 1) * auVar516._8_4_;
          auVar491._8_4_ = iVar2;
          iVar3 = (uint)((byte)(uVar47 >> 3) & 1) * auVar516._12_4_;
          auVar491._12_4_ = iVar3;
          auVar493 = vpternlogd_avx512vl(auVar493,auVar491,auVar891,0xec);
          auVar493 = vpord_avx512vl(auVar493,auVar462);
          bVar12 = (bool)((byte)uVar46 & 1);
          bVar15 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar13 = (bool)((byte)uVar426 & 1);
          bVar16 = (bool)((byte)(uVar426 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar426 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar426 >> 3) & 1);
          pfVar9 = (float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4);
          *pfVar9 = (float)((uint)bVar13 *
                            ((uint)bVar11 * auVar496._0_4_ | (uint)!bVar11 * auVar504._0_4_) |
                           (uint)!bVar13 * ((uint)bVar12 * auVar493._0_4_ | (uint)!bVar12 * iVar423)
                           );
          pfVar9[1] = (float)((uint)bVar16 *
                              ((uint)bVar14 * auVar496._4_4_ | (uint)!bVar14 * auVar504._4_4_) |
                             (uint)!bVar16 * ((uint)bVar15 * auVar493._4_4_ | (uint)!bVar15 * iVar1)
                             );
          pfVar9[2] = (float)((uint)bVar19 *
                              ((uint)bVar17 * auVar496._8_4_ | (uint)!bVar17 * auVar504._8_4_) |
                             (uint)!bVar19 * ((uint)bVar18 * auVar493._8_4_ | (uint)!bVar18 * iVar2)
                             );
          pfVar9[3] = (float)((uint)bVar22 *
                              ((uint)bVar20 * auVar496._12_4_ | (uint)!bVar20 * auVar504._12_4_) |
                             (uint)!bVar22 *
                             ((uint)bVar21 * auVar493._12_4_ | (uint)!bVar21 * iVar3));
          lVar425 = lVar425 + 4;
          iVar421 = iVar421 + -1;
        } while (iVar421 != 0);
        return;
      }
      if (bw == 1) {
        auVar559._0_4_ = *ptr1;
        uVar422 = 0;
        if (0xf < (int)uVar424) {
          auVar730 = vpbroadcastd_avx512f(ZEXT416((uint)auVar559._0_4_));
          auVar712 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar351._8_4_ = 0x80000000;
          auVar351._0_8_ = 0x8000000080000000;
          auVar351._12_4_ = 0x80000000;
          auVar351._16_4_ = 0x80000000;
          auVar351._20_4_ = 0x80000000;
          auVar351._24_4_ = 0x80000000;
          auVar351._28_4_ = 0x80000000;
          auVar351._32_4_ = 0x80000000;
          auVar351._36_4_ = 0x80000000;
          auVar351._40_4_ = 0x80000000;
          auVar351._44_4_ = 0x80000000;
          auVar351._48_4_ = 0x80000000;
          auVar351._52_4_ = 0x80000000;
          auVar351._56_4_ = 0x80000000;
          auVar351._60_4_ = 0x80000000;
          auVar712 = vpternlogd_avx512f(auVar712,auVar730,auVar351,0xf8);
          auVar726 = ZEXT864(0);
          uVar46 = vcmpps_avx512f(auVar712,auVar726,1);
          auVar712 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar799._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar712._4_4_;
          auVar799._0_4_ = (uint)((byte)uVar46 & 1) * auVar712._0_4_;
          auVar799._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar712._8_4_;
          auVar799._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar712._12_4_;
          auVar799._16_4_ = (uint)((byte)(uVar46 >> 4) & 1) * auVar712._16_4_;
          auVar799._20_4_ = (uint)((byte)(uVar46 >> 5) & 1) * auVar712._20_4_;
          auVar799._24_4_ = (uint)((byte)(uVar46 >> 6) & 1) * auVar712._24_4_;
          auVar799._28_4_ = (uint)((byte)(uVar46 >> 7) & 1) * auVar712._28_4_;
          auVar799._32_4_ = (uint)((byte)(uVar46 >> 8) & 1) * auVar712._32_4_;
          auVar799._36_4_ = (uint)((byte)(uVar46 >> 9) & 1) * auVar712._36_4_;
          auVar799._40_4_ = (uint)((byte)(uVar46 >> 10) & 1) * auVar712._40_4_;
          auVar799._44_4_ = (uint)((byte)(uVar46 >> 0xb) & 1) * auVar712._44_4_;
          auVar799._48_4_ = (uint)((byte)(uVar46 >> 0xc) & 1) * auVar712._48_4_;
          auVar799._52_4_ = (uint)((byte)(uVar46 >> 0xd) & 1) * auVar712._52_4_;
          auVar799._56_4_ = (uint)((byte)(uVar46 >> 0xe) & 1) * auVar712._56_4_;
          auVar799._60_4_ = (uint)(byte)(uVar46 >> 0xf) * auVar712._60_4_;
          auVar712 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / auVar559._0_4_)));
          iVar421 = 0xf;
          uVar46 = vcmpps_avx512f(auVar730,auVar726,1);
          auVar713 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar714 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar715 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar716 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          uVar426 = vcmpps_avx512f(auVar730,auVar726,4);
          auVar730 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          do {
            auVar1755 = *(undefined1 (*) [64])ptr;
            auVar732 = vmulps_avx512f(auVar1755,auVar712);
            uVar427 = vcmpps_avx512f(auVar1755,auVar726,1);
            auVar845 = vandps_avx512dq(auVar732,auVar715);
            auVar352._8_4_ = 0xc0490fdb;
            auVar352._0_8_ = 0xc0490fdbc0490fdb;
            auVar352._12_4_ = 0xc0490fdb;
            auVar352._16_4_ = 0xc0490fdb;
            auVar352._20_4_ = 0xc0490fdb;
            auVar352._24_4_ = 0xc0490fdb;
            auVar352._28_4_ = 0xc0490fdb;
            auVar352._32_4_ = 0xc0490fdb;
            auVar352._36_4_ = 0xc0490fdb;
            auVar352._40_4_ = 0xc0490fdb;
            auVar352._44_4_ = 0xc0490fdb;
            auVar352._48_4_ = 0xc0490fdb;
            auVar352._52_4_ = 0xc0490fdb;
            auVar352._56_4_ = 0xc0490fdb;
            auVar352._60_4_ = 0xc0490fdb;
            auVar729 = vblendmps_avx512f(auVar714,auVar352);
            bVar11 = (bool)((byte)uVar427 & 1);
            auVar800._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * in_ZMM20._0_4_;
            bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
            auVar800._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * in_ZMM20._4_4_;
            bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
            auVar800._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * in_ZMM20._8_4_;
            bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
            auVar800._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * in_ZMM20._12_4_;
            bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
            auVar800._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * in_ZMM20._16_4_;
            bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
            auVar800._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * in_ZMM20._20_4_;
            bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
            auVar800._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * in_ZMM20._24_4_;
            bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
            auVar800._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * in_ZMM20._28_4_;
            bVar11 = (bool)((byte)(uVar427 >> 8) & 1);
            auVar800._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * in_ZMM20._32_4_;
            bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
            auVar800._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * in_ZMM20._36_4_;
            bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
            auVar800._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * in_ZMM20._40_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
            auVar800._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * in_ZMM20._44_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
            auVar800._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * in_ZMM20._48_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
            auVar800._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * in_ZMM20._52_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
            auVar800._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * in_ZMM20._56_4_;
            bVar11 = SUB81(uVar427 >> 0xf,0);
            auVar800._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * in_ZMM20._60_4_;
            uVar427 = vcmpps_avx512f(auVar716,auVar845,1);
            auVar353._8_4_ = 0xbf800000;
            auVar353._0_8_ = 0xbf800000bf800000;
            auVar353._12_4_ = 0xbf800000;
            auVar353._16_4_ = 0xbf800000;
            auVar353._20_4_ = 0xbf800000;
            auVar353._24_4_ = 0xbf800000;
            auVar353._28_4_ = 0xbf800000;
            auVar353._32_4_ = 0xbf800000;
            auVar353._36_4_ = 0xbf800000;
            auVar353._40_4_ = 0xbf800000;
            auVar353._44_4_ = 0xbf800000;
            auVar353._48_4_ = 0xbf800000;
            auVar353._52_4_ = 0xbf800000;
            auVar353._56_4_ = 0xbf800000;
            auVar353._60_4_ = 0xbf800000;
            auVar729 = vblendmps_avx512f(auVar845,auVar353);
            bVar11 = (bool)((byte)uVar427 & 1);
            auVar801._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
            bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
            auVar801._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
            bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
            auVar801._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
            bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
            auVar801._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
            bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
            auVar801._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
            bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
            auVar801._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
            bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
            auVar801._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
            bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
            auVar801._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
            bVar28 = (byte)(uVar427 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar801._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * in_ZMM21._32_4_;
            bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
            auVar801._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * in_ZMM21._36_4_;
            bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
            auVar801._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * in_ZMM21._40_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
            auVar801._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * in_ZMM21._44_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
            auVar801._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * in_ZMM21._48_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
            auVar801._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * in_ZMM21._52_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
            auVar801._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * in_ZMM21._56_4_;
            bVar11 = SUB81(uVar427 >> 0xf,0);
            auVar801._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * in_ZMM21._60_4_;
            auVar845 = vmaxps_avx512f(auVar845,auVar716);
            auVar845 = vdivps_avx512f(auVar801,auVar845);
            in_ZMM21 = vmulps_avx512f(auVar845,auVar845);
            in_ZMM22 = vmulps_avx512f(in_ZMM21,in_ZMM21);
            auVar729 = vfmadd213ps_avx512f(auVar717,in_ZMM22,auVar718);
            auVar729 = vfmadd213ps_avx512f(auVar729,in_ZMM22,auVar719);
            auVar727 = vfmadd213ps_avx512f(auVar721,in_ZMM22,auVar722);
            auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar723);
            auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar724);
            auVar729 = vfmadd213ps_avx512f(auVar729,in_ZMM22,auVar720);
            auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar716);
            auVar729 = vfmadd231ps_avx512f(auVar727,in_ZMM21,auVar729);
            auVar845 = vmulps_avx512f(auVar729,auVar845);
            uVar428 = vcmpps_avx512f(auVar1755,auVar726,4);
            auVar729 = vaddps_avx512f(auVar845,auVar725);
            bVar11 = (bool)((byte)uVar427 & 1);
            auVar802._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_;
            bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
            auVar802._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar845._4_4_;
            bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
            auVar802._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar845._8_4_;
            bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
            auVar802._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar845._12_4_;
            bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
            auVar802._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar845._16_4_;
            bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
            auVar802._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar845._20_4_;
            bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
            auVar802._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar845._24_4_;
            bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
            auVar802._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar845._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar802._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar845._32_4_;
            bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
            auVar802._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar845._36_4_;
            bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
            auVar802._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar845._40_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
            auVar802._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar845._44_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
            auVar802._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar845._48_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
            auVar802._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar845._52_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
            auVar802._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar845._56_4_;
            bVar11 = SUB81(uVar427 >> 0xf,0);
            auVar802._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar845._60_4_;
            auVar732 = vpternlogd_avx512f(auVar802,auVar732,auVar713,0xf8);
            auVar845 = vaddps_avx512f(auVar732,auVar800);
            bVar11 = (bool)((byte)uVar46 & 1);
            in_ZMM19._0_4_ = (uint)bVar11 * auVar845._0_4_ | (uint)!bVar11 * auVar732._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            in_ZMM19._4_4_ = (uint)bVar11 * auVar845._4_4_ | (uint)!bVar11 * auVar732._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            in_ZMM19._8_4_ = (uint)bVar11 * auVar845._8_4_ | (uint)!bVar11 * auVar732._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            in_ZMM19._12_4_ = (uint)bVar11 * auVar845._12_4_ | (uint)!bVar11 * auVar732._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            in_ZMM19._16_4_ = (uint)bVar11 * auVar845._16_4_ | (uint)!bVar11 * auVar732._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            in_ZMM19._20_4_ = (uint)bVar11 * auVar845._20_4_ | (uint)!bVar11 * auVar732._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            in_ZMM19._24_4_ = (uint)bVar11 * auVar845._24_4_ | (uint)!bVar11 * auVar732._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            in_ZMM19._28_4_ = (uint)bVar11 * auVar845._28_4_ | (uint)!bVar11 * auVar732._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            in_ZMM19._32_4_ = (uint)bVar11 * auVar845._32_4_ | (uint)!bVar11 * auVar732._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            in_ZMM19._36_4_ = (uint)bVar11 * auVar845._36_4_ | (uint)!bVar11 * auVar732._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            in_ZMM19._40_4_ = (uint)bVar11 * auVar845._40_4_ | (uint)!bVar11 * auVar732._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            in_ZMM19._44_4_ = (uint)bVar11 * auVar845._44_4_ | (uint)!bVar11 * auVar732._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            in_ZMM19._48_4_ = (uint)bVar11 * auVar845._48_4_ | (uint)!bVar11 * auVar732._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            in_ZMM19._52_4_ = (uint)bVar11 * auVar845._52_4_ | (uint)!bVar11 * auVar732._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            in_ZMM19._56_4_ = (uint)bVar11 * auVar845._56_4_ | (uint)!bVar11 * auVar732._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            in_ZMM19._60_4_ = (uint)bVar11 * auVar845._60_4_ | (uint)!bVar11 * auVar732._60_4_;
            auVar1755 = vpternlogd_avx512f(auVar1755,auVar713,auVar730,0xea);
            bVar11 = (bool)((byte)uVar426 & 1);
            auVar803._0_4_ = bVar11 * in_ZMM19._0_4_ | (uint)!bVar11 * auVar1755._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar803._4_4_ = bVar11 * in_ZMM19._4_4_ | (uint)!bVar11 * auVar1755._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar803._8_4_ = bVar11 * in_ZMM19._8_4_ | (uint)!bVar11 * auVar1755._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar803._12_4_ = bVar11 * in_ZMM19._12_4_ | (uint)!bVar11 * auVar1755._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar803._16_4_ = bVar11 * in_ZMM19._16_4_ | (uint)!bVar11 * auVar1755._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar803._20_4_ = bVar11 * in_ZMM19._20_4_ | (uint)!bVar11 * auVar1755._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar803._24_4_ = bVar11 * in_ZMM19._24_4_ | (uint)!bVar11 * auVar1755._24_4_;
            bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
            auVar803._28_4_ = bVar11 * in_ZMM19._28_4_ | (uint)!bVar11 * auVar1755._28_4_;
            bVar11 = (bool)((byte)(uVar426 >> 8) & 1);
            auVar803._32_4_ = bVar11 * in_ZMM19._32_4_ | (uint)!bVar11 * auVar1755._32_4_;
            bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
            auVar803._36_4_ = bVar11 * in_ZMM19._36_4_ | (uint)!bVar11 * auVar1755._36_4_;
            bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
            auVar803._40_4_ = bVar11 * in_ZMM19._40_4_ | (uint)!bVar11 * auVar1755._40_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
            auVar803._44_4_ = bVar11 * in_ZMM19._44_4_ | (uint)!bVar11 * auVar1755._44_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
            auVar803._48_4_ = bVar11 * in_ZMM19._48_4_ | (uint)!bVar11 * auVar1755._48_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
            auVar803._52_4_ = bVar11 * in_ZMM19._52_4_ | (uint)!bVar11 * auVar1755._52_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
            auVar803._56_4_ = bVar11 * in_ZMM19._56_4_ | (uint)!bVar11 * auVar1755._56_4_;
            bVar11 = SUB81(uVar426 >> 0xf,0);
            auVar803._60_4_ = bVar11 * in_ZMM19._60_4_ | (uint)!bVar11 * auVar1755._60_4_;
            auVar1755 = vblendmps_avx512f(auVar799,auVar803);
            bVar11 = (bool)((byte)uVar428 & 1);
            bVar12 = (bool)((byte)(uVar428 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar428 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar428 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar428 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar428 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar428 >> 6) & 1);
            bVar18 = (bool)((byte)(uVar428 >> 7) & 1);
            bVar19 = (bool)((byte)(uVar428 >> 8) & 1);
            bVar20 = (bool)((byte)(uVar428 >> 9) & 1);
            bVar21 = (bool)((byte)(uVar428 >> 10) & 1);
            bVar22 = (bool)((byte)(uVar428 >> 0xb) & 1);
            bVar23 = (bool)((byte)(uVar428 >> 0xc) & 1);
            bVar24 = (bool)((byte)(uVar428 >> 0xd) & 1);
            bVar25 = (bool)((byte)(uVar428 >> 0xe) & 1);
            bVar26 = SUB81(uVar428 >> 0xf,0);
            *(uint *)*(undefined1 (*) [32])outptr =
                 (uint)bVar11 * auVar1755._0_4_ | !bVar11 * auVar803._0_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 4) =
                 (uint)bVar12 * auVar1755._4_4_ | !bVar12 * auVar803._4_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 8) =
                 (uint)bVar13 * auVar1755._8_4_ | !bVar13 * auVar803._8_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0xc) =
                 (uint)bVar14 * auVar1755._12_4_ | !bVar14 * auVar803._12_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x10) =
                 (uint)bVar15 * auVar1755._16_4_ | !bVar15 * auVar803._16_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x14) =
                 (uint)bVar16 * auVar1755._20_4_ | !bVar16 * auVar803._20_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x18) =
                 (uint)bVar17 * auVar1755._24_4_ | !bVar17 * auVar803._24_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x1c) =
                 (uint)bVar18 * auVar1755._28_4_ | !bVar18 * auVar803._28_4_;
            *(uint *)*(undefined1 (*) [32])((long)outptr + 0x20) =
                 (uint)bVar19 * auVar1755._32_4_ | !bVar19 * auVar803._32_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 4) =
                 (uint)bVar20 * auVar1755._36_4_ | !bVar20 * auVar803._36_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 8) =
                 (uint)bVar21 * auVar1755._40_4_ | !bVar21 * auVar803._40_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0xc) =
                 (uint)bVar22 * auVar1755._44_4_ | !bVar22 * auVar803._44_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x10) =
                 (uint)bVar23 * auVar1755._48_4_ | !bVar23 * auVar803._48_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x14) =
                 (uint)bVar24 * auVar1755._52_4_ | !bVar24 * auVar803._52_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x18) =
                 (uint)bVar25 * auVar1755._56_4_ | !bVar25 * auVar803._56_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x1c) =
                 (uint)bVar26 * auVar1755._60_4_ | !bVar26 * auVar803._60_4_;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 0x10;
            in_ZMM20 = auVar800;
          } while (iVar421 < (int)uVar424);
          uVar422 = uVar424 & 0x7ffffff0;
          auVar559._0_4_ = *ptr1;
        }
        if ((int)(uVar422 | 7) < (int)uVar424) {
          auVar906._8_4_ = 0x40490fdb;
          auVar906._0_8_ = 0x40490fdb40490fdb;
          auVar906._12_4_ = 0x40490fdb;
          auVar906._16_4_ = 0x40490fdb;
          auVar906._20_4_ = 0x40490fdb;
          auVar906._24_4_ = 0x40490fdb;
          auVar906._28_4_ = 0x40490fdb;
          auVar1183._8_4_ = 0x80000000;
          auVar1183._0_8_ = 0x8000000080000000;
          auVar1183._12_4_ = 0x80000000;
          auVar1183._16_4_ = 0x80000000;
          auVar1183._20_4_ = 0x80000000;
          auVar1183._24_4_ = 0x80000000;
          auVar1183._28_4_ = 0x80000000;
          auVar982._4_4_ = auVar559._0_4_;
          auVar982._0_4_ = auVar559._0_4_;
          auVar982._8_4_ = auVar559._0_4_;
          auVar982._12_4_ = auVar559._0_4_;
          auVar982._16_4_ = auVar559._0_4_;
          auVar982._20_4_ = auVar559._0_4_;
          auVar982._24_4_ = auVar559._0_4_;
          auVar982._28_4_ = auVar559._0_4_;
          auVar671 = vpternlogd_avx512vl(auVar1183,auVar982,auVar906,0xea);
          auVar1047._0_4_ = 1.0 / auVar559._0_4_;
          auVar1047._4_4_ = auVar1047._0_4_;
          auVar1047._8_4_ = auVar1047._0_4_;
          auVar1047._12_4_ = auVar1047._0_4_;
          auVar1047._16_4_ = auVar1047._0_4_;
          auVar1047._20_4_ = auVar1047._0_4_;
          auVar1047._24_4_ = auVar1047._0_4_;
          auVar1047._28_4_ = auVar1047._0_4_;
          auVar1092._0_12_ = ZEXT812(0);
          auVar1092._12_4_ = 0;
          uVar45 = vcmpps_avx512vl(ZEXT1632(auVar1092),auVar671,2);
          uVar46 = vcmpps_avx512vl(auVar982,ZEXT1632(auVar1092),1);
          auVar1184._8_4_ = 0x80000000;
          auVar1184._0_8_ = 0x8000000080000000;
          auVar1184._12_4_ = 0x80000000;
          auVar1184._16_4_ = 0x80000000;
          auVar1184._20_4_ = 0x80000000;
          auVar1184._24_4_ = 0x80000000;
          auVar1184._28_4_ = 0x80000000;
          auVar1240._8_4_ = 0x40490fdb;
          auVar1240._0_8_ = 0x40490fdb40490fdb;
          auVar1240._12_4_ = 0x40490fdb;
          auVar1240._16_4_ = 0x40490fdb;
          auVar1240._20_4_ = 0x40490fdb;
          auVar1240._24_4_ = 0x40490fdb;
          auVar1240._28_4_ = 0x40490fdb;
          auVar1301._8_4_ = 0x7fffffff;
          auVar1301._0_8_ = 0x7fffffff7fffffff;
          auVar1301._12_4_ = 0x7fffffff;
          auVar1301._16_4_ = 0x7fffffff;
          auVar1301._20_4_ = 0x7fffffff;
          auVar1301._24_4_ = 0x7fffffff;
          auVar1301._28_4_ = 0x7fffffff;
          auVar1359._8_4_ = 0x3f800000;
          auVar1359._0_8_ = 0x3f8000003f800000;
          auVar1359._12_4_ = 0x3f800000;
          auVar1359._16_4_ = 0x3f800000;
          auVar1359._20_4_ = 0x3f800000;
          auVar1359._24_4_ = 0x3f800000;
          auVar1359._28_4_ = 0x3f800000;
          auVar1415._8_4_ = 0xbc83a25c;
          auVar1415._0_8_ = 0xbc83a25cbc83a25c;
          auVar1415._12_4_ = 0xbc83a25c;
          auVar1415._16_4_ = 0xbc83a25c;
          auVar1415._20_4_ = 0xbc83a25c;
          auVar1415._24_4_ = 0xbc83a25c;
          auVar1415._28_4_ = 0xbc83a25c;
          auVar1469._8_4_ = 0xbd99b01e;
          auVar1469._0_8_ = 0xbd99b01ebd99b01e;
          auVar1469._12_4_ = 0xbd99b01e;
          auVar1469._16_4_ = 0xbd99b01e;
          auVar1469._20_4_ = 0xbd99b01e;
          auVar1469._24_4_ = 0xbd99b01e;
          auVar1469._28_4_ = 0xbd99b01e;
          auVar1523._8_4_ = 0xbe117200;
          auVar1523._0_8_ = 0xbe117200be117200;
          auVar1523._12_4_ = 0xbe117200;
          auVar1523._16_4_ = 0xbe117200;
          auVar1523._20_4_ = 0xbe117200;
          auVar1523._24_4_ = 0xbe117200;
          auVar1523._28_4_ = 0xbe117200;
          auVar1577._8_4_ = 0xbeaaaa53;
          auVar1577._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1577._12_4_ = 0xbeaaaa53;
          auVar1577._16_4_ = 0xbeaaaa53;
          auVar1577._20_4_ = 0xbeaaaa53;
          auVar1577._24_4_ = 0xbeaaaa53;
          auVar1577._28_4_ = 0xbeaaaa53;
          auVar1631._8_4_ = 0x3b3ac537;
          auVar1631._0_8_ = 0x3b3ac5373b3ac537;
          auVar1631._12_4_ = 0x3b3ac537;
          auVar1631._16_4_ = 0x3b3ac537;
          auVar1631._20_4_ = 0x3b3ac537;
          auVar1631._24_4_ = 0x3b3ac537;
          auVar1631._28_4_ = 0x3b3ac537;
          auVar1685._8_4_ = 0x3d2edd4e;
          auVar1685._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1685._12_4_ = 0x3d2edd4e;
          auVar1685._16_4_ = 0x3d2edd4e;
          auVar1685._20_4_ = 0x3d2edd4e;
          auVar1685._24_4_ = 0x3d2edd4e;
          auVar1685._28_4_ = 0x3d2edd4e;
          auVar1737._8_4_ = 0x3dd9ed24;
          auVar1737._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1737._12_4_ = 0x3dd9ed24;
          auVar1737._16_4_ = 0x3dd9ed24;
          auVar1737._20_4_ = 0x3dd9ed24;
          auVar1737._24_4_ = 0x3dd9ed24;
          auVar1737._28_4_ = 0x3dd9ed24;
          auVar1788._8_4_ = 0x3e4cb974;
          auVar1788._0_8_ = 0x3e4cb9743e4cb974;
          auVar1788._12_4_ = 0x3e4cb974;
          auVar1788._16_4_ = 0x3e4cb974;
          auVar1788._20_4_ = 0x3e4cb974;
          auVar1788._24_4_ = 0x3e4cb974;
          auVar1788._28_4_ = 0x3e4cb974;
          auVar671 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          auVar672 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          uVar872 = uVar422;
          do {
            auVar675 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
            auVar684 = vmulps_avx512vl(auVar675,auVar1047);
            auVar681 = ZEXT1632(auVar1092);
            uVar426 = vcmpps_avx512vl(auVar675,auVar681,1);
            vandps_avx512vl(auVar684,auVar1301);
            auVar194._8_4_ = 0xc0490fdb;
            auVar194._0_8_ = 0xc0490fdbc0490fdb;
            auVar194._12_4_ = 0xc0490fdb;
            auVar194._16_4_ = 0xc0490fdb;
            auVar194._20_4_ = 0xc0490fdb;
            auVar194._24_4_ = 0xc0490fdb;
            auVar194._28_4_ = 0xc0490fdb;
            auVar676 = vblendmps_avx512vl(auVar1240,auVar194);
            bVar11 = (bool)((byte)uVar426 & 1);
            auVar621._0_4_ = (uint)bVar11 * auVar676._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar621._4_4_ = (uint)bVar11 * auVar676._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar621._8_4_ = (uint)bVar11 * auVar676._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar621._12_4_ = (uint)bVar11 * auVar676._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar621._16_4_ = (uint)bVar11 * auVar676._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar621._20_4_ = (uint)bVar11 * auVar676._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar621._24_4_ = (uint)bVar11 * auVar676._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar621._28_4_ = (uint)bVar11 * auVar676._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
            in_ZMM21 = ZEXT3264(auVar621);
            uVar426 = vcmpps_avx512vl(auVar1359,auVar684,1);
            auVar195._8_4_ = 0xbf800000;
            auVar195._0_8_ = 0xbf800000bf800000;
            auVar195._12_4_ = 0xbf800000;
            auVar195._16_4_ = 0xbf800000;
            auVar195._20_4_ = 0xbf800000;
            auVar195._24_4_ = 0xbf800000;
            auVar195._28_4_ = 0xbf800000;
            auVar676 = vblendmps_avx512vl(auVar684,auVar195);
            bVar28 = (byte)uVar426;
            auVar622._0_4_ =
                 (uint)(bVar28 & 1) * auVar676._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar622._4_4_ = (uint)bVar11 * auVar676._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar622._8_4_ = (uint)bVar11 * auVar676._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar622._12_4_ = (uint)bVar11 * auVar676._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar622._16_4_ = (uint)bVar11 * auVar676._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar622._20_4_ = (uint)bVar11 * auVar676._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar622._24_4_ = (uint)bVar11 * auVar676._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar622._28_4_ = (uint)bVar11 * auVar676._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
            auVar676 = vdivps_avx512vl(auVar622,auVar684);
            auVar623._0_4_ =
                 (uint)(bVar28 & 1) * auVar676._0_4_ | !(bool)(bVar28 & 1) * auVar622._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar623._4_4_ = (uint)bVar11 * auVar676._4_4_ | !bVar11 * auVar622._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar623._8_4_ = (uint)bVar11 * auVar676._8_4_ | !bVar11 * auVar622._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar623._12_4_ = (uint)bVar11 * auVar676._12_4_ | !bVar11 * auVar622._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar623._16_4_ = (uint)bVar11 * auVar676._16_4_ | !bVar11 * auVar622._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar623._20_4_ = (uint)bVar11 * auVar676._20_4_ | !bVar11 * auVar622._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar623._24_4_ = (uint)bVar11 * auVar676._24_4_ | !bVar11 * auVar622._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar623._28_4_ = (uint)bVar11 * auVar676._28_4_ | !bVar11 * auVar622._28_4_;
            in_ZMM22 = ZEXT3264(auVar623);
            uVar427 = vcmpps_avx512vl(auVar675,auVar681,4);
            auVar676 = vmulps_avx512vl(auVar623,auVar623);
            vandps_avx512vl(auVar675,auVar1184);
            auVar675 = vmulps_avx512vl(auVar676,auVar676);
            auVar677 = vfmadd213ps_avx512vl(auVar1415,auVar675,auVar1469);
            auVar677 = vfmadd213ps_avx512vl(auVar677,auVar675,auVar1523);
            auVar680 = vfmadd213ps_avx512vl(auVar1631,auVar675,auVar1685);
            auVar680 = vfmadd213ps_avx512vl(auVar680,auVar675,auVar1737);
            auVar677 = vfmadd213ps_avx512vl(auVar677,auVar675,auVar1577);
            auVar680 = vfmadd213ps_avx512vl(auVar680,auVar675,auVar1788);
            auVar675 = vfmadd213ps_avx512vl(auVar680,auVar675,auVar1359);
            auVar675 = vfmadd231ps_avx512vl(auVar675,auVar676,auVar677);
            uVar428 = vcmpps_avx512vl(auVar982,auVar681,4);
            uVar428 = uVar427 & uVar428;
            auVar675 = vmulps_avx512vl(auVar675,auVar623);
            auVar677 = vaddps_avx512vl(auVar675,auVar671);
            auVar624._0_4_ =
                 (uint)(bVar28 & 1) * auVar677._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar675._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar624._4_4_ = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * auVar675._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar624._8_4_ = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * auVar675._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar624._12_4_ = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * auVar675._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar624._16_4_ = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * auVar675._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar624._20_4_ = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * auVar675._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar624._24_4_ = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * auVar675._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar624._28_4_ = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * auVar675._28_4_;
            auVar675 = vpternlogd_avx512vl(auVar624,auVar684,auVar1184,0xf8);
            auVar684 = vaddps_avx512vl(auVar675,auVar621);
            bVar11 = (bool)((byte)uVar46 & 1);
            bVar13 = (bool)((byte)(uVar46 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar46 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar46 >> 4) & 1);
            bVar21 = (bool)((byte)(uVar46 >> 5) & 1);
            bVar23 = (bool)((byte)(uVar46 >> 6) & 1);
            bVar25 = SUB81(uVar46 >> 7,0);
            auVar676 = vorps_avx512vl(auVar676,auVar672);
            auVar625._4_4_ = (uint)((byte)(uVar427 >> 1) & 1) * auVar676._4_4_;
            auVar625._0_4_ = (uint)((byte)uVar427 & 1) * auVar676._0_4_;
            auVar625._8_4_ = (uint)((byte)(uVar427 >> 2) & 1) * auVar676._8_4_;
            auVar625._12_4_ = (uint)((byte)(uVar427 >> 3) & 1) * auVar676._12_4_;
            auVar625._16_4_ = (uint)((byte)(uVar427 >> 4) & 1) * auVar676._16_4_;
            auVar625._20_4_ = (uint)((byte)(uVar427 >> 5) & 1) * auVar676._20_4_;
            auVar625._24_4_ = (uint)((byte)(uVar427 >> 6) & 1) * auVar676._24_4_;
            auVar625._28_4_ = (uint)(byte)(uVar427 >> 7) * auVar676._28_4_;
            bVar28 = (byte)uVar427 | (byte)uVar45;
            auVar676 = vorps_avx512vl(auVar625,auVar906);
            auVar677 = vmovdqa32_avx512vl(auVar625);
            bVar14 = (bool)(bVar28 >> 1 & 1);
            bVar16 = (bool)(bVar28 >> 2 & 1);
            bVar18 = (bool)(bVar28 >> 3 & 1);
            bVar20 = (bool)(bVar28 >> 4 & 1);
            bVar22 = (bool)(bVar28 >> 5 & 1);
            bVar24 = (bool)(bVar28 >> 6 & 1);
            bVar12 = (bool)((byte)uVar428 & 1);
            auVar626._0_4_ =
                 (uint)bVar12 * ((uint)bVar11 * auVar684._0_4_ | (uint)!bVar11 * auVar675._0_4_) |
                 (uint)!bVar12 *
                 ((uint)(bVar28 & 1) * auVar677._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar676._0_4_);
            bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
            auVar626._4_4_ =
                 (uint)bVar11 * ((uint)bVar13 * auVar684._4_4_ | (uint)!bVar13 * auVar675._4_4_) |
                 (uint)!bVar11 * ((uint)bVar14 * auVar677._4_4_ | (uint)!bVar14 * auVar676._4_4_);
            bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
            auVar626._8_4_ =
                 (uint)bVar11 * ((uint)bVar15 * auVar684._8_4_ | (uint)!bVar15 * auVar675._8_4_) |
                 (uint)!bVar11 * ((uint)bVar16 * auVar677._8_4_ | (uint)!bVar16 * auVar676._8_4_);
            bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
            auVar626._12_4_ =
                 (uint)bVar11 * ((uint)bVar17 * auVar684._12_4_ | (uint)!bVar17 * auVar675._12_4_) |
                 (uint)!bVar11 * ((uint)bVar18 * auVar677._12_4_ | (uint)!bVar18 * auVar676._12_4_);
            bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
            auVar626._16_4_ =
                 (uint)bVar11 * ((uint)bVar19 * auVar684._16_4_ | (uint)!bVar19 * auVar675._16_4_) |
                 (uint)!bVar11 * ((uint)bVar20 * auVar677._16_4_ | (uint)!bVar20 * auVar676._16_4_);
            bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
            auVar626._20_4_ =
                 (uint)bVar11 * ((uint)bVar21 * auVar684._20_4_ | (uint)!bVar21 * auVar675._20_4_) |
                 (uint)!bVar11 * ((uint)bVar22 * auVar677._20_4_ | (uint)!bVar22 * auVar676._20_4_);
            bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
            auVar626._24_4_ =
                 (uint)bVar11 * ((uint)bVar23 * auVar684._24_4_ | (uint)!bVar23 * auVar675._24_4_) |
                 (uint)!bVar11 * ((uint)bVar24 * auVar677._24_4_ | (uint)!bVar24 * auVar676._24_4_);
            bVar11 = SUB81(uVar428 >> 7,0);
            auVar626._28_4_ =
                 (uint)bVar11 * ((uint)bVar25 * auVar684._28_4_ | (uint)!bVar25 * auVar675._28_4_) |
                 (uint)!bVar11 *
                 ((uint)(bVar28 >> 7) * auVar677._28_4_ |
                 (uint)!(bool)(bVar28 >> 7) * auVar676._28_4_);
            in_ZMM19 = ZEXT3264(auVar626);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            *(undefined1 (*) [32])outptr = auVar626;
            outptr = (float *)((long)outptr + 0x20);
            uVar422 = uVar872 + 8;
            iVar421 = uVar872 + 0xf;
            uVar872 = uVar422;
          } while (iVar421 < (int)uVar424);
          auVar559._0_4_ = *ptr1;
        }
        if ((int)uVar424 <= (int)(uVar422 | 3)) {
          return;
        }
        auVar881._4_4_ = auVar559._0_4_;
        auVar881._0_4_ = auVar559._0_4_;
        auVar881._8_4_ = auVar559._0_4_;
        auVar881._12_4_ = auVar559._0_4_;
        auVar924._8_4_ = 0x40490fdb;
        auVar924._0_8_ = 0x40490fdb40490fdb;
        auVar924._12_4_ = 0x40490fdb;
        auVar1146._8_4_ = 0x80000000;
        auVar1146._0_8_ = 0x8000000080000000;
        auVar1146._12_4_ = 0x80000000;
        auVar462 = vpternlogd_avx512vl(auVar1146,auVar881,auVar924,0xea);
        auVar1014._0_4_ = 1.0 / auVar559._0_4_;
        auVar1014._4_4_ = auVar1014._0_4_;
        auVar1014._8_4_ = auVar1014._0_4_;
        auVar1014._12_4_ = auVar1014._0_4_;
        lVar425 = 0;
        auVar1093._0_12_ = ZEXT812(0);
        auVar1093._12_4_ = 0;
        uVar45 = vcmpps_avx512vl(auVar1093,auVar462,2);
        uVar46 = vcmpps_avx512vl(auVar881,auVar1093,1);
        auVar1147._8_4_ = 0x80000000;
        auVar1147._0_8_ = 0x8000000080000000;
        auVar1147._12_4_ = 0x80000000;
        auVar1200._8_4_ = 0x40490fdb;
        auVar1200._0_8_ = 0x40490fdb40490fdb;
        auVar1200._12_4_ = 0x40490fdb;
        auVar1264._8_4_ = 0x7fffffff;
        auVar1264._0_8_ = 0x7fffffff7fffffff;
        auVar1264._12_4_ = 0x7fffffff;
        auVar1327._8_4_ = 0x3f800000;
        auVar1327._0_8_ = 0x3f8000003f800000;
        auVar1327._12_4_ = 0x3f800000;
        auVar1383._8_4_ = 0xbc83a25c;
        auVar1383._0_8_ = 0xbc83a25cbc83a25c;
        auVar1383._12_4_ = 0xbc83a25c;
        auVar1437._8_4_ = 0xbd99b01e;
        auVar1437._0_8_ = 0xbd99b01ebd99b01e;
        auVar1437._12_4_ = 0xbd99b01e;
        auVar1491._8_4_ = 0xbe117200;
        auVar1491._0_8_ = 0xbe117200be117200;
        auVar1491._12_4_ = 0xbe117200;
        auVar1545._8_4_ = 0xbeaaaa53;
        auVar1545._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1545._12_4_ = 0xbeaaaa53;
        auVar1599._8_4_ = 0x3b3ac537;
        auVar1599._0_8_ = 0x3b3ac5373b3ac537;
        auVar1599._12_4_ = 0x3b3ac537;
        auVar1653._8_4_ = 0x3d2edd4e;
        auVar1653._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1653._12_4_ = 0x3d2edd4e;
        auVar1707._8_4_ = 0x3dd9ed24;
        auVar1707._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1707._12_4_ = 0x3dd9ed24;
        auVar1760._8_4_ = 0x3e4cb974;
        auVar1760._0_8_ = 0x3e4cb9743e4cb974;
        auVar1760._12_4_ = 0x3e4cb974;
        auVar462 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        auVar492 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        do {
          auVar493 = *(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4);
          uVar426 = vcmpps_avx512vl(auVar493,auVar1093,1);
          auVar68._8_4_ = 0xc0490fdb;
          auVar68._0_8_ = 0xc0490fdbc0490fdb;
          auVar68._12_4_ = 0xc0490fdb;
          auVar516 = vblendmps_avx512vl(auVar1200,auVar68);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar456._0_4_ = (uint)bVar11 * auVar516._0_4_ | (uint)!bVar11 * in_ZMM19._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar456._4_4_ = (uint)bVar11 * auVar516._4_4_ | (uint)!bVar11 * in_ZMM19._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar456._8_4_ = (uint)bVar11 * auVar516._8_4_ | (uint)!bVar11 * in_ZMM19._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar456._12_4_ = (uint)bVar11 * auVar516._12_4_ | (uint)!bVar11 * in_ZMM19._12_4_;
          uVar426 = vcmpps_avx512vl(auVar493,auVar1093,4);
          auVar516 = vmulps_avx512vl(auVar493,auVar1014);
          auVar504 = vandps_avx512vl(auVar516,auVar1264);
          uVar427 = vcmpps_avx512vl(auVar1327,auVar504,1);
          auVar69._8_4_ = 0xbf800000;
          auVar69._0_8_ = 0xbf800000bf800000;
          auVar69._12_4_ = 0xbf800000;
          auVar496 = vblendmps_avx512vl(auVar504,auVar69);
          bVar28 = (byte)uVar427;
          auVar457._0_4_ =
               (uint)(bVar28 & 1) * auVar496._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar457._4_4_ = (uint)bVar11 * auVar496._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar457._8_4_ = (uint)bVar11 * auVar496._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar457._12_4_ = (uint)bVar11 * auVar496._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
          uVar428 = vcmpps_avx512vl(auVar881,auVar1093,4);
          uVar428 = uVar426 & uVar428;
          auVar493 = vandps_avx512vl(auVar493,auVar1147);
          auVar504 = vdivps_avx512vl(auVar457,auVar504);
          auVar458._0_4_ =
               (uint)(bVar28 & 1) * auVar504._0_4_ | !(bool)(bVar28 & 1) * auVar457._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar458._4_4_ = (uint)bVar11 * auVar504._4_4_ | !bVar11 * auVar457._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar458._8_4_ = (uint)bVar11 * auVar504._8_4_ | !bVar11 * auVar457._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar458._12_4_ = (uint)bVar11 * auVar504._12_4_ | !bVar11 * auVar457._12_4_;
          in_ZMM22 = ZEXT1664(auVar458);
          auVar504 = vmulps_avx512vl(auVar458,auVar458);
          auVar496 = vmulps_avx512vl(auVar504,auVar504);
          auVar497 = vfmadd213ps_avx512vl(auVar1383,auVar496,auVar1437);
          auVar497 = vfmadd213ps_avx512vl(auVar497,auVar496,auVar1491);
          auVar497 = vfmadd213ps_avx512vl(auVar497,auVar496,auVar1545);
          auVar498 = vfmadd213ps_avx512vl(auVar1599,auVar496,auVar1653);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar496,auVar1707);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar496,auVar1760);
          auVar496 = vfmadd213ps_avx512vl(auVar498,auVar496,auVar1327);
          auVar504 = vfmadd231ps_avx512vl(auVar496,auVar504,auVar497);
          auVar504 = vmulps_avx512vl(auVar504,auVar458);
          auVar496 = vaddps_avx512vl(auVar504,auVar462);
          auVar459._0_4_ =
               (uint)(bVar28 & 1) * auVar496._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar504._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar459._4_4_ = (uint)bVar11 * auVar496._4_4_ | (uint)!bVar11 * auVar504._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar459._8_4_ = (uint)bVar11 * auVar496._8_4_ | (uint)!bVar11 * auVar504._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar459._12_4_ = (uint)bVar11 * auVar496._12_4_ | (uint)!bVar11 * auVar504._12_4_;
          auVar516 = vpternlogd_avx512vl(auVar459,auVar516,auVar1147,0xf8);
          auVar504 = vaddps_avx512vl(auVar516,auVar456);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar14 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar493 = vorps_avx512vl(auVar493,auVar492);
          auVar460._4_4_ = (uint)((byte)(uVar426 >> 1) & 1) * auVar493._4_4_;
          auVar460._0_4_ = (uint)((byte)uVar426 & 1) * auVar493._0_4_;
          auVar460._8_4_ = (uint)((byte)(uVar426 >> 2) & 1) * auVar493._8_4_;
          auVar460._12_4_ = (uint)((byte)(uVar426 >> 3) & 1) * auVar493._12_4_;
          uVar47 = (ushort)uVar426 | (ushort)uVar45;
          auVar493 = vorps_avx512vl(auVar460,auVar924);
          auVar496 = vmovdqa32_avx512vl(auVar460);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar13 = (bool)((byte)uVar428 & 1);
          auVar461._0_4_ =
               (uint)bVar13 * ((uint)bVar11 * auVar504._0_4_ | (uint)!bVar11 * auVar516._0_4_) |
               (uint)!bVar13 * ((uint)bVar12 * auVar496._0_4_ | (uint)!bVar12 * auVar493._0_4_);
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          auVar461._4_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar504._4_4_ | (uint)!bVar14 * auVar516._4_4_) |
               (uint)!bVar11 * ((uint)bVar15 * auVar496._4_4_ | (uint)!bVar15 * auVar493._4_4_);
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          auVar461._8_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar504._8_4_ | (uint)!bVar16 * auVar516._8_4_) |
               (uint)!bVar11 * ((uint)bVar17 * auVar496._8_4_ | (uint)!bVar17 * auVar493._8_4_);
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar461._12_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar504._12_4_ | (uint)!bVar18 * auVar516._12_4_) |
               (uint)!bVar11 * ((uint)bVar19 * auVar496._12_4_ | (uint)!bVar19 * auVar493._12_4_);
          in_ZMM19 = ZEXT1664(auVar461);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [32])outptr + lVar425 * 4) = auVar461;
          lVar425 = lVar425 + 4;
        } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar421 == 0x10) {
        auVar730 = *(undefined1 (*) [64])ptr;
        auVar1755 = ZEXT1264(ZEXT812(0));
        uVar46 = vcmpps_avx512f(auVar730,auVar1755,1);
        auVar712 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar713 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar725._0_4_ = (uint)bVar11 * auVar713._0_4_ | (uint)!bVar11 * auVar712._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar725._4_4_ = (uint)bVar11 * auVar713._4_4_ | (uint)!bVar11 * auVar712._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar725._8_4_ = (uint)bVar11 * auVar713._8_4_ | (uint)!bVar11 * auVar712._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar725._12_4_ = (uint)bVar11 * auVar713._12_4_ | (uint)!bVar11 * auVar712._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar725._16_4_ = (uint)bVar11 * auVar713._16_4_ | (uint)!bVar11 * auVar712._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar725._20_4_ = (uint)bVar11 * auVar713._20_4_ | (uint)!bVar11 * auVar712._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar725._24_4_ = (uint)bVar11 * auVar713._24_4_ | (uint)!bVar11 * auVar712._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        auVar725._28_4_ = (uint)bVar11 * auVar713._28_4_ | (uint)!bVar11 * auVar712._28_4_;
        bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
        auVar725._32_4_ = (uint)bVar11 * auVar713._32_4_ | (uint)!bVar11 * auVar712._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        auVar725._36_4_ = (uint)bVar11 * auVar713._36_4_ | (uint)!bVar11 * auVar712._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        auVar725._40_4_ = (uint)bVar11 * auVar713._40_4_ | (uint)!bVar11 * auVar712._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        auVar725._44_4_ = (uint)bVar11 * auVar713._44_4_ | (uint)!bVar11 * auVar712._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        auVar725._48_4_ = (uint)bVar11 * auVar713._48_4_ | (uint)!bVar11 * auVar712._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        auVar725._52_4_ = (uint)bVar11 * auVar713._52_4_ | (uint)!bVar11 * auVar712._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        auVar725._56_4_ = (uint)bVar11 * auVar713._56_4_ | (uint)!bVar11 * auVar712._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        auVar725._60_4_ = (uint)bVar11 * auVar713._60_4_ | (uint)!bVar11 * auVar712._60_4_;
        auVar712 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        auVar724._8_4_ = 0x80000000;
        auVar724._0_8_ = 0x8000000080000000;
        auVar724._12_4_ = 0x80000000;
        auVar724._16_4_ = 0x80000000;
        auVar724._20_4_ = 0x80000000;
        auVar724._24_4_ = 0x80000000;
        auVar724._28_4_ = 0x80000000;
        auVar724._32_4_ = 0x80000000;
        auVar724._36_4_ = 0x80000000;
        auVar724._40_4_ = 0x80000000;
        auVar724._44_4_ = 0x80000000;
        auVar724._48_4_ = 0x80000000;
        auVar724._52_4_ = 0x80000000;
        auVar724._56_4_ = 0x80000000;
        auVar724._60_4_ = 0x80000000;
        auVar712 = vpternlogd_avx512f(auVar712,auVar730,auVar724,0xf8);
        auVar713 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        uVar46 = vcmpps_avx512f(auVar730,auVar1755,4);
        auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar726 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        uVar424 = uVar422;
        do {
          auVar732 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar462 = vdivss_avx512f(SUB6416(ZEXT464(0x3f800000),0),auVar732._0_16_);
          auVar845 = vbroadcastss_avx512f(auVar462);
          auVar845 = vmulps_avx512f(auVar730,auVar845);
          auVar729 = vandps_avx512dq(auVar845,auVar714);
          uVar426 = vcmpps_avx512f(auVar715,auVar729,1);
          auVar354._8_4_ = 0xbf800000;
          auVar354._0_8_ = 0xbf800000bf800000;
          auVar354._12_4_ = 0xbf800000;
          auVar354._16_4_ = 0xbf800000;
          auVar354._20_4_ = 0xbf800000;
          auVar354._24_4_ = 0xbf800000;
          auVar354._28_4_ = 0xbf800000;
          auVar354._32_4_ = 0xbf800000;
          auVar354._36_4_ = 0xbf800000;
          auVar354._40_4_ = 0xbf800000;
          auVar354._44_4_ = 0xbf800000;
          auVar354._48_4_ = 0xbf800000;
          auVar354._52_4_ = 0xbf800000;
          auVar354._56_4_ = 0xbf800000;
          auVar354._60_4_ = 0xbf800000;
          auVar727 = vblendmps_avx512f(auVar729,auVar354);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar835._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar835._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar835._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar835._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar835._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar835._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar835._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar835._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
          bVar28 = (byte)(uVar426 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar835._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * in_ZMM21._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar835._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * in_ZMM21._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar835._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * in_ZMM21._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar835._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * in_ZMM21._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar835._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * in_ZMM21._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar835._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * in_ZMM21._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar835._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * in_ZMM21._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar835._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * in_ZMM21._60_4_;
          auVar729 = vmaxps_avx512f(auVar729,auVar715);
          auVar729 = vdivps_avx512f(auVar835,auVar729);
          uVar427 = vcmpps_avx512f(auVar732,auVar1755,4);
          in_ZMM21 = vmulps_avx512f(auVar729,auVar729);
          in_ZMM22 = vmulps_avx512f(in_ZMM21,in_ZMM21);
          auVar727 = vfmadd213ps_avx512f(auVar716,in_ZMM22,auVar717);
          auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar718);
          auVar728 = vfmadd213ps_avx512f(auVar720,in_ZMM22,auVar721);
          auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar719);
          auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM22,auVar722);
          auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM22,auVar723);
          auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM22,auVar715);
          uVar428 = vcmpps_avx512f(auVar732,auVar1755,1);
          auVar727 = vfmadd231ps_avx512f(auVar728,in_ZMM21,auVar727);
          auVar729 = vmulps_avx512f(auVar727,auVar729);
          auVar732 = vpternlogd_avx512f(auVar732,auVar713,auVar726,0xea);
          auVar727 = vaddps_avx512f(auVar729,auVar724);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar836._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar729._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar836._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar729._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar836._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar729._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar836._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar729._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar836._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar729._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar836._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar729._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar836._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar729._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar836._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar729._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar836._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar729._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar836._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar729._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar836._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar729._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar836._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar729._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar836._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar729._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar836._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar729._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar836._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar729._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar836._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar729._60_4_;
          uVar426 = vcmpps_avx512f(auVar732,auVar1755,1);
          auVar732 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar729 = vpternlogd_avx512f(auVar836,auVar845,auVar713,0xf8);
          auVar727 = vaddps_avx512f(auVar729,auVar725);
          bVar11 = (bool)((byte)uVar428 & 1);
          in_ZMM20._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar729._0_4_;
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          in_ZMM20._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar729._4_4_;
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          in_ZMM20._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar729._8_4_;
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          in_ZMM20._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar729._12_4_;
          bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
          in_ZMM20._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar729._16_4_;
          bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
          in_ZMM20._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar729._20_4_;
          bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
          in_ZMM20._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar729._24_4_;
          bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
          in_ZMM20._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar729._28_4_;
          bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
          in_ZMM20._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar729._32_4_;
          bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
          in_ZMM20._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar729._36_4_;
          bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
          in_ZMM20._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar729._40_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
          in_ZMM20._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar729._44_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
          in_ZMM20._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar729._48_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
          in_ZMM20._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar729._52_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
          in_ZMM20._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar729._56_4_;
          bVar11 = SUB81(uVar428 >> 0xf,0);
          in_ZMM20._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar729._60_4_;
          auVar729 = vblendmps_avx512f(auVar712,in_ZMM20);
          bVar11 = (bool)((byte)uVar427 & 1);
          bVar13 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar427 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar427 >> 4) & 1);
          bVar21 = (bool)((byte)(uVar427 >> 5) & 1);
          bVar23 = (bool)((byte)(uVar427 >> 6) & 1);
          bVar25 = (bool)((byte)(uVar427 >> 7) & 1);
          bVar27 = (bool)((byte)(uVar427 >> 8) & 1);
          bVar30 = (bool)((byte)(uVar427 >> 9) & 1);
          bVar32 = (bool)((byte)(uVar427 >> 10) & 1);
          bVar34 = (bool)((byte)(uVar427 >> 0xb) & 1);
          bVar36 = (bool)((byte)(uVar427 >> 0xc) & 1);
          bVar38 = (bool)((byte)(uVar427 >> 0xd) & 1);
          bVar40 = (bool)((byte)(uVar427 >> 0xe) & 1);
          bVar42 = SUB81(uVar427 >> 0xf,0);
          bVar12 = (bool)((byte)uVar46 & 1);
          bVar14 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar22 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar24 = (bool)((byte)(uVar46 >> 6) & 1);
          bVar26 = (bool)((byte)(uVar46 >> 7) & 1);
          bVar29 = (bool)((byte)(uVar46 >> 8) & 1);
          bVar31 = (bool)((byte)(uVar46 >> 9) & 1);
          bVar33 = (bool)((byte)(uVar46 >> 10) & 1);
          bVar35 = (bool)((byte)(uVar46 >> 0xb) & 1);
          bVar37 = (bool)((byte)(uVar46 >> 0xc) & 1);
          bVar39 = (bool)((byte)(uVar46 >> 0xd) & 1);
          bVar41 = (bool)((byte)(uVar46 >> 0xe) & 1);
          bVar43 = SUB81(uVar46 >> 0xf,0);
          *(uint *)*(undefined1 (*) [64])outptr =
               (uint)bVar12 * ((uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_) |
               (uint)!bVar12 * (uint)((byte)uVar426 & 1) * auVar732._0_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
               (uint)bVar14 * ((uint)bVar13 * auVar729._4_4_ | (uint)!bVar13 * auVar845._4_4_) |
               (uint)!bVar14 * (uint)((byte)(uVar426 >> 1) & 1) * auVar732._4_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
               (uint)bVar16 * ((uint)bVar15 * auVar729._8_4_ | (uint)!bVar15 * auVar845._8_4_) |
               (uint)!bVar16 * (uint)((byte)(uVar426 >> 2) & 1) * auVar732._8_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
               (uint)bVar18 * ((uint)bVar17 * auVar729._12_4_ | (uint)!bVar17 * auVar845._12_4_) |
               (uint)!bVar18 * (uint)((byte)(uVar426 >> 3) & 1) * auVar732._12_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
               (uint)bVar20 * ((uint)bVar19 * auVar729._16_4_ | (uint)!bVar19 * auVar845._16_4_) |
               (uint)!bVar20 * (uint)((byte)(uVar426 >> 4) & 1) * auVar732._16_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
               (uint)bVar22 * ((uint)bVar21 * auVar729._20_4_ | (uint)!bVar21 * auVar845._20_4_) |
               (uint)!bVar22 * (uint)((byte)(uVar426 >> 5) & 1) * auVar732._20_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
               (uint)bVar24 * ((uint)bVar23 * auVar729._24_4_ | (uint)!bVar23 * auVar845._24_4_) |
               (uint)!bVar24 * (uint)((byte)(uVar426 >> 6) & 1) * auVar732._24_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
               (uint)bVar26 * ((uint)bVar25 * auVar729._28_4_ | (uint)!bVar25 * auVar845._28_4_) |
               (uint)!bVar26 * (uint)((byte)(uVar426 >> 7) & 1) * auVar732._28_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x20) =
               (uint)bVar29 * ((uint)bVar27 * auVar729._32_4_ | (uint)!bVar27 * auVar845._32_4_) |
               (uint)!bVar29 * (uint)((byte)(uVar426 >> 8) & 1) * auVar732._32_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x24) =
               (uint)bVar31 * ((uint)bVar30 * auVar729._36_4_ | (uint)!bVar30 * auVar845._36_4_) |
               (uint)!bVar31 * (uint)((byte)(uVar426 >> 9) & 1) * auVar732._36_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x28) =
               (uint)bVar33 * ((uint)bVar32 * auVar729._40_4_ | (uint)!bVar32 * auVar845._40_4_) |
               (uint)!bVar33 * (uint)((byte)(uVar426 >> 10) & 1) * auVar732._40_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x2c) =
               (uint)bVar35 * ((uint)bVar34 * auVar729._44_4_ | (uint)!bVar34 * auVar845._44_4_) |
               (uint)!bVar35 * (uint)((byte)(uVar426 >> 0xb) & 1) * auVar732._44_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x30) =
               (uint)bVar37 * ((uint)bVar36 * auVar729._48_4_ | (uint)!bVar36 * auVar845._48_4_) |
               (uint)!bVar37 * (uint)((byte)(uVar426 >> 0xc) & 1) * auVar732._48_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x34) =
               (uint)bVar39 * ((uint)bVar38 * auVar729._52_4_ | (uint)!bVar38 * auVar845._52_4_) |
               (uint)!bVar39 * (uint)((byte)(uVar426 >> 0xd) & 1) * auVar732._52_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x38) =
               (uint)bVar41 * ((uint)bVar40 * auVar729._56_4_ | (uint)!bVar40 * auVar845._56_4_) |
               (uint)!bVar41 * (uint)((byte)(uVar426 >> 0xe) & 1) * auVar732._56_4_;
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x3c) =
               (uint)bVar43 * ((uint)bVar42 * auVar729._60_4_ | (uint)!bVar42 * auVar845._60_4_) |
               (uint)!bVar43 * (uint)(byte)(uVar426 >> 0xf) * auVar732._60_4_;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
        } while (uVar424 != 0);
      }
      if (iVar421 == 8) {
        auVar730 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
        uVar424 = 0;
        if (1 < (int)uVar422) {
          auVar732 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar46 = vcmpps_avx512f(auVar730,auVar732,1);
          auVar712 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar713 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar1755._0_4_ = (uint)bVar11 * auVar713._0_4_ | (uint)!bVar11 * auVar712._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar1755._4_4_ = (uint)bVar11 * auVar713._4_4_ | (uint)!bVar11 * auVar712._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar1755._8_4_ = (uint)bVar11 * auVar713._8_4_ | (uint)!bVar11 * auVar712._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar1755._12_4_ = (uint)bVar11 * auVar713._12_4_ | (uint)!bVar11 * auVar712._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar1755._16_4_ = (uint)bVar11 * auVar713._16_4_ | (uint)!bVar11 * auVar712._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar1755._20_4_ = (uint)bVar11 * auVar713._20_4_ | (uint)!bVar11 * auVar712._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar1755._24_4_ = (uint)bVar11 * auVar713._24_4_ | (uint)!bVar11 * auVar712._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar1755._28_4_ = (uint)bVar11 * auVar713._28_4_ | (uint)!bVar11 * auVar712._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar1755._32_4_ = (uint)bVar11 * auVar713._32_4_ | (uint)!bVar11 * auVar712._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar1755._36_4_ = (uint)bVar11 * auVar713._36_4_ | (uint)!bVar11 * auVar712._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar1755._40_4_ = (uint)bVar11 * auVar713._40_4_ | (uint)!bVar11 * auVar712._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar1755._44_4_ = (uint)bVar11 * auVar713._44_4_ | (uint)!bVar11 * auVar712._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar1755._48_4_ = (uint)bVar11 * auVar713._48_4_ | (uint)!bVar11 * auVar712._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar1755._52_4_ = (uint)bVar11 * auVar713._52_4_ | (uint)!bVar11 * auVar712._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar1755._56_4_ = (uint)bVar11 * auVar713._56_4_ | (uint)!bVar11 * auVar712._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar1755._60_4_ = (uint)bVar11 * auVar713._60_4_ | (uint)!bVar11 * auVar712._60_4_;
          auVar712 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar726._8_4_ = 0x80000000;
          auVar726._0_8_ = 0x8000000080000000;
          auVar726._12_4_ = 0x80000000;
          auVar726._16_4_ = 0x80000000;
          auVar726._20_4_ = 0x80000000;
          auVar726._24_4_ = 0x80000000;
          auVar726._28_4_ = 0x80000000;
          auVar726._32_4_ = 0x80000000;
          auVar726._36_4_ = 0x80000000;
          auVar726._40_4_ = 0x80000000;
          auVar726._44_4_ = 0x80000000;
          auVar726._48_4_ = 0x80000000;
          auVar726._52_4_ = 0x80000000;
          auVar726._56_4_ = 0x80000000;
          auVar726._60_4_ = 0x80000000;
          auVar712 = vpternlogd_avx512f(auVar712,auVar730,auVar726,0xf8);
          iVar423 = 1;
          uVar46 = vcmpps_avx512f(auVar730,auVar732,4);
          auVar713 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar725 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          do {
            auVar671 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar672 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar726 = vinsertf64x4_avx512f(ZEXT3264(auVar671),auVar672,1);
            auVar845 = vdivps_avx512f(auVar730,auVar726);
            auVar729 = vandps_avx512dq(auVar845,auVar714);
            uVar426 = vcmpps_avx512f(auVar715,auVar729,1);
            auVar355._8_4_ = 0xbf800000;
            auVar355._0_8_ = 0xbf800000bf800000;
            auVar355._12_4_ = 0xbf800000;
            auVar355._16_4_ = 0xbf800000;
            auVar355._20_4_ = 0xbf800000;
            auVar355._24_4_ = 0xbf800000;
            auVar355._28_4_ = 0xbf800000;
            auVar355._32_4_ = 0xbf800000;
            auVar355._36_4_ = 0xbf800000;
            auVar355._40_4_ = 0xbf800000;
            auVar355._44_4_ = 0xbf800000;
            auVar355._48_4_ = 0xbf800000;
            auVar355._52_4_ = 0xbf800000;
            auVar355._56_4_ = 0xbf800000;
            auVar355._60_4_ = 0xbf800000;
            auVar727 = vblendmps_avx512f(auVar729,auVar355);
            bVar11 = (bool)((byte)uVar426 & 1);
            auVar837._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * in_ZMM20._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar837._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * in_ZMM20._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar837._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * in_ZMM20._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar837._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * in_ZMM20._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar837._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * in_ZMM20._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar837._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * in_ZMM20._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar837._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * in_ZMM20._24_4_;
            bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
            auVar837._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * in_ZMM20._28_4_;
            bVar28 = (byte)(uVar426 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar837._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * in_ZMM20._32_4_;
            bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
            auVar837._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * in_ZMM20._36_4_;
            bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
            auVar837._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * in_ZMM20._40_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
            auVar837._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * in_ZMM20._44_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
            auVar837._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * in_ZMM20._48_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
            auVar837._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * in_ZMM20._52_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
            auVar837._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * in_ZMM20._56_4_;
            bVar11 = SUB81(uVar426 >> 0xf,0);
            auVar837._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * in_ZMM20._60_4_;
            auVar729 = vmaxps_avx512f(auVar729,auVar715);
            auVar729 = vdivps_avx512f(auVar837,auVar729);
            in_ZMM20 = vmulps_avx512f(auVar729,auVar729);
            uVar427 = vcmpps_avx512f(auVar726,auVar732,4);
            auVar727 = vmulps_avx512f(in_ZMM20,in_ZMM20);
            auVar728 = vfmadd213ps_avx512f(auVar716,auVar727,auVar717);
            auVar728 = vfmadd213ps_avx512f(auVar728,auVar727,auVar718);
            auVar731 = vfmadd213ps_avx512f(auVar720,auVar727,auVar721);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar727,auVar722);
            in_ZMM22 = vfmadd213ps_avx512f(auVar728,auVar727,auVar719);
            auVar728 = vfmadd213ps_avx512f(auVar731,auVar727,auVar723);
            auVar727 = vfmadd213ps_avx512f(auVar728,auVar727,auVar715);
            auVar727 = vfmadd231ps_avx512f(auVar727,in_ZMM20,in_ZMM22);
            uVar428 = vcmpps_avx512f(auVar726,auVar732,1);
            auVar729 = vmulps_avx512f(auVar727,auVar729);
            auVar727 = vaddps_avx512f(auVar729,auVar724);
            bVar11 = (bool)((byte)uVar426 & 1);
            auVar838._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar729._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar838._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar729._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar838._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar729._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar838._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar729._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar838._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar729._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar838._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar729._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar838._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar729._24_4_;
            bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
            auVar838._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar729._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar838._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar729._32_4_;
            bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
            auVar838._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar729._36_4_;
            bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
            auVar838._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar729._40_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
            auVar838._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar729._44_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
            auVar838._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar729._48_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
            auVar838._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar729._52_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
            auVar838._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar729._56_4_;
            bVar11 = SUB81(uVar426 >> 0xf,0);
            auVar838._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar729._60_4_;
            auVar726 = vpternlogd_avx512f(auVar726,auVar713,auVar725,0xea);
            auVar729 = vpternlogd_avx512f(auVar838,auVar845,auVar713,0xf8);
            uVar426 = vcmpps_avx512f(auVar726,auVar732,1);
            auVar726 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar727 = vaddps_avx512f(auVar729,auVar1755);
            bVar11 = (bool)((byte)uVar428 & 1);
            auVar839._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar729._0_4_;
            bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
            auVar839._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar729._4_4_;
            bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
            auVar839._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar729._8_4_;
            bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
            auVar839._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar729._12_4_;
            bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
            auVar839._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar729._16_4_;
            bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
            auVar839._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar729._20_4_;
            bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
            auVar839._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar729._24_4_;
            bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
            auVar839._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar729._28_4_;
            bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
            auVar839._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar729._32_4_;
            bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
            auVar839._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar729._36_4_;
            bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
            auVar839._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar729._40_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
            auVar839._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar729._44_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
            auVar839._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar729._48_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
            auVar839._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar729._52_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
            auVar839._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar729._56_4_;
            bVar11 = SUB81(uVar428 >> 0xf,0);
            auVar839._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar729._60_4_;
            auVar729 = vblendmps_avx512f(auVar712,auVar839);
            bVar11 = (bool)((byte)uVar427 & 1);
            bVar13 = (bool)((byte)(uVar427 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar427 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar427 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar427 >> 4) & 1);
            bVar21 = (bool)((byte)(uVar427 >> 5) & 1);
            bVar23 = (bool)((byte)(uVar427 >> 6) & 1);
            bVar25 = (bool)((byte)(uVar427 >> 7) & 1);
            bVar27 = (bool)((byte)(uVar427 >> 8) & 1);
            bVar30 = (bool)((byte)(uVar427 >> 9) & 1);
            bVar32 = (bool)((byte)(uVar427 >> 10) & 1);
            bVar34 = (bool)((byte)(uVar427 >> 0xb) & 1);
            bVar36 = (bool)((byte)(uVar427 >> 0xc) & 1);
            bVar38 = (bool)((byte)(uVar427 >> 0xd) & 1);
            bVar40 = (bool)((byte)(uVar427 >> 0xe) & 1);
            bVar42 = SUB81(uVar427 >> 0xf,0);
            bVar12 = (bool)((byte)uVar46 & 1);
            bVar14 = (bool)((byte)(uVar46 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar46 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar46 >> 3) & 1);
            bVar20 = (bool)((byte)(uVar46 >> 4) & 1);
            bVar22 = (bool)((byte)(uVar46 >> 5) & 1);
            bVar24 = (bool)((byte)(uVar46 >> 6) & 1);
            bVar26 = (bool)((byte)(uVar46 >> 7) & 1);
            bVar29 = (bool)((byte)(uVar46 >> 8) & 1);
            bVar31 = (bool)((byte)(uVar46 >> 9) & 1);
            bVar33 = (bool)((byte)(uVar46 >> 10) & 1);
            bVar35 = (bool)((byte)(uVar46 >> 0xb) & 1);
            bVar37 = (bool)((byte)(uVar46 >> 0xc) & 1);
            bVar39 = (bool)((byte)(uVar46 >> 0xd) & 1);
            bVar41 = (bool)((byte)(uVar46 >> 0xe) & 1);
            bVar43 = SUB81(uVar46 >> 0xf,0);
            *(uint *)*(undefined1 (*) [64])outptr =
                 (uint)bVar12 * ((uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_) |
                 (uint)!bVar12 * (uint)((byte)uVar426 & 1) * auVar726._0_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
                 (uint)bVar14 * ((uint)bVar13 * auVar729._4_4_ | (uint)!bVar13 * auVar845._4_4_) |
                 (uint)!bVar14 * (uint)((byte)(uVar426 >> 1) & 1) * auVar726._4_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
                 (uint)bVar16 * ((uint)bVar15 * auVar729._8_4_ | (uint)!bVar15 * auVar845._8_4_) |
                 (uint)!bVar16 * (uint)((byte)(uVar426 >> 2) & 1) * auVar726._8_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
                 (uint)bVar18 * ((uint)bVar17 * auVar729._12_4_ | (uint)!bVar17 * auVar845._12_4_) |
                 (uint)!bVar18 * (uint)((byte)(uVar426 >> 3) & 1) * auVar726._12_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
                 (uint)bVar20 * ((uint)bVar19 * auVar729._16_4_ | (uint)!bVar19 * auVar845._16_4_) |
                 (uint)!bVar20 * (uint)((byte)(uVar426 >> 4) & 1) * auVar726._16_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
                 (uint)bVar22 * ((uint)bVar21 * auVar729._20_4_ | (uint)!bVar21 * auVar845._20_4_) |
                 (uint)!bVar22 * (uint)((byte)(uVar426 >> 5) & 1) * auVar726._20_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
                 (uint)bVar24 * ((uint)bVar23 * auVar729._24_4_ | (uint)!bVar23 * auVar845._24_4_) |
                 (uint)!bVar24 * (uint)((byte)(uVar426 >> 6) & 1) * auVar726._24_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
                 (uint)bVar26 * ((uint)bVar25 * auVar729._28_4_ | (uint)!bVar25 * auVar845._28_4_) |
                 (uint)!bVar26 * (uint)((byte)(uVar426 >> 7) & 1) * auVar726._28_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x20) =
                 (uint)bVar29 * ((uint)bVar27 * auVar729._32_4_ | (uint)!bVar27 * auVar845._32_4_) |
                 (uint)!bVar29 * (uint)((byte)(uVar426 >> 8) & 1) * auVar726._32_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x24) =
                 (uint)bVar31 * ((uint)bVar30 * auVar729._36_4_ | (uint)!bVar30 * auVar845._36_4_) |
                 (uint)!bVar31 * (uint)((byte)(uVar426 >> 9) & 1) * auVar726._36_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x28) =
                 (uint)bVar33 * ((uint)bVar32 * auVar729._40_4_ | (uint)!bVar32 * auVar845._40_4_) |
                 (uint)!bVar33 * (uint)((byte)(uVar426 >> 10) & 1) * auVar726._40_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x2c) =
                 (uint)bVar35 * ((uint)bVar34 * auVar729._44_4_ | (uint)!bVar34 * auVar845._44_4_) |
                 (uint)!bVar35 * (uint)((byte)(uVar426 >> 0xb) & 1) * auVar726._44_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x30) =
                 (uint)bVar37 * ((uint)bVar36 * auVar729._48_4_ | (uint)!bVar36 * auVar845._48_4_) |
                 (uint)!bVar37 * (uint)((byte)(uVar426 >> 0xc) & 1) * auVar726._48_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x34) =
                 (uint)bVar39 * ((uint)bVar38 * auVar729._52_4_ | (uint)!bVar38 * auVar845._52_4_) |
                 (uint)!bVar39 * (uint)((byte)(uVar426 >> 0xd) & 1) * auVar726._52_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x38) =
                 (uint)bVar41 * ((uint)bVar40 * auVar729._56_4_ | (uint)!bVar40 * auVar845._56_4_) |
                 (uint)!bVar41 * (uint)((byte)(uVar426 >> 0xe) & 1) * auVar726._56_4_;
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x3c) =
                 (uint)bVar43 * ((uint)bVar42 * auVar729._60_4_ | (uint)!bVar42 * auVar845._60_4_) |
                 (uint)!bVar43 * (uint)(byte)(uVar426 >> 0xf) * auVar726._60_4_;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          auVar462 = ZEXT816(0) << 0x40;
          auVar196._8_4_ = 0x80000000;
          auVar196._0_8_ = 0x8000000080000000;
          auVar196._12_4_ = 0x80000000;
          auVar196._16_4_ = 0x80000000;
          auVar196._20_4_ = 0x80000000;
          auVar196._24_4_ = 0x80000000;
          auVar196._28_4_ = 0x80000000;
          auVar675 = auVar730._0_32_;
          auVar671 = vpandd_avx512vl(auVar675,auVar196);
          uVar46 = vcmpps_avx512vl(auVar675,ZEXT1632(auVar462),4);
          uVar426 = vcmpps_avx512vl(auVar675,ZEXT1632(auVar462),1);
          auVar672 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar652._0_4_ = (uint)bVar11 * auVar672._0_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar652._4_4_ = (uint)bVar11 * auVar672._4_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar652._8_4_ = (uint)bVar11 * auVar672._8_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar652._12_4_ = (uint)bVar11 * auVar672._12_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar652._16_4_ = (uint)bVar11 * auVar672._16_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar652._20_4_ = (uint)bVar11 * auVar672._20_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar652._24_4_ = (uint)bVar11 * auVar672._24_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar652._28_4_ = (uint)bVar11 * auVar672._28_4_ | (uint)!bVar11 * 0x40490fdb;
          auVar197._8_4_ = 0x3fc90fdb;
          auVar197._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar197._12_4_ = 0x3fc90fdb;
          auVar197._16_4_ = 0x3fc90fdb;
          auVar197._20_4_ = 0x3fc90fdb;
          auVar197._24_4_ = 0x3fc90fdb;
          auVar197._28_4_ = 0x3fc90fdb;
          auVar671 = vpord_avx512vl(auVar671,auVar197);
          auVar653._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar671._4_4_;
          auVar653._0_4_ = (uint)((byte)uVar46 & 1) * auVar671._0_4_;
          auVar653._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar671._8_4_;
          auVar653._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar671._12_4_;
          auVar653._16_4_ = (uint)((byte)(uVar46 >> 4) & 1) * auVar671._16_4_;
          auVar653._20_4_ = (uint)((byte)(uVar46 >> 5) & 1) * auVar671._20_4_;
          auVar653._24_4_ = (uint)((byte)(uVar46 >> 6) & 1) * auVar671._24_4_;
          auVar653._28_4_ = (uint)(byte)(uVar46 >> 7) * auVar671._28_4_;
          auVar1187._8_4_ = 0x80000000;
          auVar1187._0_8_ = 0x8000000080000000;
          auVar1187._12_4_ = 0x80000000;
          auVar1187._16_4_ = 0x80000000;
          auVar1187._20_4_ = 0x80000000;
          auVar1187._24_4_ = 0x80000000;
          auVar1187._28_4_ = 0x80000000;
          auVar1250._8_4_ = 0x7fffffff;
          auVar1250._0_8_ = 0x7fffffff7fffffff;
          auVar1250._12_4_ = 0x7fffffff;
          auVar1250._16_4_ = 0x7fffffff;
          auVar1250._20_4_ = 0x7fffffff;
          auVar1250._24_4_ = 0x7fffffff;
          auVar1250._28_4_ = 0x7fffffff;
          auVar1309._8_4_ = 0x3f800000;
          auVar1309._0_8_ = 0x3f8000003f800000;
          auVar1309._12_4_ = 0x3f800000;
          auVar1309._16_4_ = 0x3f800000;
          auVar1309._20_4_ = 0x3f800000;
          auVar1309._24_4_ = 0x3f800000;
          auVar1309._28_4_ = 0x3f800000;
          auVar1365._8_4_ = 0xbc83a25c;
          auVar1365._0_8_ = 0xbc83a25cbc83a25c;
          auVar1365._12_4_ = 0xbc83a25c;
          auVar1365._16_4_ = 0xbc83a25c;
          auVar1365._20_4_ = 0xbc83a25c;
          auVar1365._24_4_ = 0xbc83a25c;
          auVar1365._28_4_ = 0xbc83a25c;
          auVar1422._8_4_ = 0xbd99b01e;
          auVar1422._0_8_ = 0xbd99b01ebd99b01e;
          auVar1422._12_4_ = 0xbd99b01e;
          auVar1422._16_4_ = 0xbd99b01e;
          auVar1422._20_4_ = 0xbd99b01e;
          auVar1422._24_4_ = 0xbd99b01e;
          auVar1422._28_4_ = 0xbd99b01e;
          auVar1476._8_4_ = 0xbe117200;
          auVar1476._0_8_ = 0xbe117200be117200;
          auVar1476._12_4_ = 0xbe117200;
          auVar1476._16_4_ = 0xbe117200;
          auVar1476._20_4_ = 0xbe117200;
          auVar1476._24_4_ = 0xbe117200;
          auVar1476._28_4_ = 0xbe117200;
          auVar1530._8_4_ = 0xbeaaaa53;
          auVar1530._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1530._12_4_ = 0xbeaaaa53;
          auVar1530._16_4_ = 0xbeaaaa53;
          auVar1530._20_4_ = 0xbeaaaa53;
          auVar1530._24_4_ = 0xbeaaaa53;
          auVar1530._28_4_ = 0xbeaaaa53;
          auVar1584._8_4_ = 0x3b3ac537;
          auVar1584._0_8_ = 0x3b3ac5373b3ac537;
          auVar1584._12_4_ = 0x3b3ac537;
          auVar1584._16_4_ = 0x3b3ac537;
          auVar1584._20_4_ = 0x3b3ac537;
          auVar1584._24_4_ = 0x3b3ac537;
          auVar1584._28_4_ = 0x3b3ac537;
          auVar1638._8_4_ = 0x3d2edd4e;
          auVar1638._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1638._12_4_ = 0x3d2edd4e;
          auVar1638._16_4_ = 0x3d2edd4e;
          auVar1638._20_4_ = 0x3d2edd4e;
          auVar1638._24_4_ = 0x3d2edd4e;
          auVar1638._28_4_ = 0x3d2edd4e;
          auVar1692._8_4_ = 0x3dd9ed24;
          auVar1692._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1692._12_4_ = 0x3dd9ed24;
          auVar1692._16_4_ = 0x3dd9ed24;
          auVar1692._20_4_ = 0x3dd9ed24;
          auVar1692._24_4_ = 0x3dd9ed24;
          auVar1692._28_4_ = 0x3dd9ed24;
          auVar1743._8_4_ = 0x3e4cb974;
          auVar1743._0_8_ = 0x3e4cb9743e4cb974;
          auVar1743._12_4_ = 0x3e4cb974;
          auVar1743._16_4_ = 0x3e4cb974;
          auVar1743._20_4_ = 0x3e4cb974;
          auVar1743._24_4_ = 0x3e4cb974;
          auVar1743._28_4_ = 0x3e4cb974;
          auVar1793._8_4_ = 0x3fc90fdb;
          auVar1793._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1793._12_4_ = 0x3fc90fdb;
          auVar1793._16_4_ = 0x3fc90fdb;
          auVar1793._20_4_ = 0x3fc90fdb;
          auVar1793._24_4_ = 0x3fc90fdb;
          auVar1793._28_4_ = 0x3fc90fdb;
          auVar671 = vpbroadcastd_avx512vl(ZEXT416(0x40490fdb));
          auVar672 = vpord_avx512vl(auVar653,auVar671);
          do {
            auVar684 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar492 = vdivss_avx512f(ZEXT416(0x3f800000),auVar684._0_16_);
            auVar676 = vbroadcastss_avx512vl(auVar492);
            auVar676 = vmulps_avx512vl(auVar675,auVar676);
            in_ZMM20 = ZEXT3264(auVar676);
            vandps_avx512vl(auVar676,auVar1250);
            uVar426 = vcmpps_avx512vl(auVar1309,auVar676,1);
            auVar198._8_4_ = 0xbf800000;
            auVar198._0_8_ = 0xbf800000bf800000;
            auVar198._12_4_ = 0xbf800000;
            auVar198._16_4_ = 0xbf800000;
            auVar198._20_4_ = 0xbf800000;
            auVar198._24_4_ = 0xbf800000;
            auVar198._28_4_ = 0xbf800000;
            auVar677 = vblendmps_avx512vl(auVar676,auVar198);
            bVar28 = (byte)uVar426;
            auVar654._0_4_ =
                 (uint)(bVar28 & 1) * auVar677._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar654._4_4_ = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar654._8_4_ = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar654._12_4_ = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar654._16_4_ = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar654._20_4_ = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar654._24_4_ = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar654._28_4_ = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
            auVar677 = vdivps_avx512vl(auVar654,auVar676);
            auVar655._0_4_ =
                 (uint)(bVar28 & 1) * auVar677._0_4_ | !(bool)(bVar28 & 1) * auVar654._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar655._4_4_ = (uint)bVar11 * auVar677._4_4_ | !bVar11 * auVar654._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar655._8_4_ = (uint)bVar11 * auVar677._8_4_ | !bVar11 * auVar654._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar655._12_4_ = (uint)bVar11 * auVar677._12_4_ | !bVar11 * auVar654._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar655._16_4_ = (uint)bVar11 * auVar677._16_4_ | !bVar11 * auVar654._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar655._20_4_ = (uint)bVar11 * auVar677._20_4_ | !bVar11 * auVar654._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar655._24_4_ = (uint)bVar11 * auVar677._24_4_ | !bVar11 * auVar654._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar655._28_4_ = (uint)bVar11 * auVar677._28_4_ | !bVar11 * auVar654._28_4_;
            in_ZMM22 = ZEXT3264(auVar655);
            auVar562 = ZEXT1632(auVar462);
            uVar427 = vcmpps_avx512vl(auVar684,auVar562,4);
            uVar427 = uVar46 & uVar427;
            auVar677 = vmulps_avx512vl(auVar655,auVar655);
            auVar680 = vmulps_avx512vl(auVar677,auVar677);
            uVar428 = vcmpps_avx512vl(auVar684,auVar562,1);
            auVar681 = vfmadd213ps_avx512vl(auVar1365,auVar680,auVar1422);
            auVar681 = vfmadd213ps_avx512vl(auVar681,auVar680,auVar1476);
            auVar682 = vfmadd213ps_avx512vl(auVar1584,auVar680,auVar1638);
            auVar682 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1692);
            auVar682 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1743);
            auVar681 = vfmadd213ps_avx512vl(auVar681,auVar680,auVar1530);
            auVar680 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1309);
            auVar677 = vfmadd231ps_avx512vl(auVar680,auVar677,auVar681);
            auVar677 = vmulps_avx512vl(auVar677,auVar655);
            auVar680 = vaddps_avx512vl(auVar677,auVar1793);
            auVar656._0_4_ =
                 (uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar677._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar656._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * auVar677._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar656._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * auVar677._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar656._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * auVar677._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar656._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * auVar677._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar656._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * auVar677._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar656._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * auVar677._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar656._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * auVar677._28_4_;
            auVar676 = vpternlogd_avx512vl(auVar656,auVar676,auVar1187,0xf8);
            auVar684 = vpternlogd_avx512vl(auVar684,auVar671,auVar1187,0xec);
            uVar45 = vcmpps_avx512vl(auVar562,auVar684,2);
            auVar677 = vaddps_avx512vl(auVar676,auVar652);
            bVar11 = (bool)((byte)uVar428 & 1);
            bVar13 = (bool)((byte)(uVar428 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar428 >> 2) & 1);
            bVar19 = (bool)((byte)(uVar428 >> 3) & 1);
            bVar22 = (bool)((byte)(uVar428 >> 4) & 1);
            bVar25 = (bool)((byte)(uVar428 >> 5) & 1);
            bVar29 = (bool)((byte)(uVar428 >> 6) & 1);
            bVar32 = SUB81(uVar428 >> 7,0);
            bVar28 = (byte)uVar46 | (byte)uVar45;
            auVar680 = vpblendmd_avx512vl(auVar672,auVar653);
            bVar14 = (bool)(bVar28 >> 1 & 1);
            bVar17 = (bool)(bVar28 >> 2 & 1);
            bVar20 = (bool)(bVar28 >> 3 & 1);
            bVar23 = (bool)(bVar28 >> 4 & 1);
            bVar26 = (bool)(bVar28 >> 5 & 1);
            bVar30 = (bool)(bVar28 >> 6 & 1);
            bVar12 = (bool)((byte)uVar427 & 1);
            bVar15 = (bool)((byte)(uVar427 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar427 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar427 >> 3) & 1);
            bVar24 = (bool)((byte)(uVar427 >> 4) & 1);
            bVar27 = (bool)((byte)(uVar427 >> 5) & 1);
            bVar31 = (bool)((byte)(uVar427 >> 6) & 1);
            bVar33 = SUB81(uVar427 >> 7,0);
            *(uint *)*(undefined1 (*) [64])outptr =
                 (uint)bVar12 * ((uint)bVar11 * auVar677._0_4_ | (uint)!bVar11 * auVar676._0_4_) |
                 (uint)!bVar12 *
                 ((uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar684._0_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
                 (uint)bVar15 * ((uint)bVar13 * auVar677._4_4_ | (uint)!bVar13 * auVar676._4_4_) |
                 (uint)!bVar15 * ((uint)bVar14 * auVar680._4_4_ | (uint)!bVar14 * auVar684._4_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
                 (uint)bVar18 * ((uint)bVar16 * auVar677._8_4_ | (uint)!bVar16 * auVar676._8_4_) |
                 (uint)!bVar18 * ((uint)bVar17 * auVar680._8_4_ | (uint)!bVar17 * auVar684._8_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
                 (uint)bVar21 * ((uint)bVar19 * auVar677._12_4_ | (uint)!bVar19 * auVar676._12_4_) |
                 (uint)!bVar21 * ((uint)bVar20 * auVar680._12_4_ | (uint)!bVar20 * auVar684._12_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
                 (uint)bVar24 * ((uint)bVar22 * auVar677._16_4_ | (uint)!bVar22 * auVar676._16_4_) |
                 (uint)!bVar24 * ((uint)bVar23 * auVar680._16_4_ | (uint)!bVar23 * auVar684._16_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
                 (uint)bVar27 * ((uint)bVar25 * auVar677._20_4_ | (uint)!bVar25 * auVar676._20_4_) |
                 (uint)!bVar27 * ((uint)bVar26 * auVar680._20_4_ | (uint)!bVar26 * auVar684._20_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
                 (uint)bVar31 * ((uint)bVar29 * auVar677._24_4_ | (uint)!bVar29 * auVar676._24_4_) |
                 (uint)!bVar31 * ((uint)bVar30 * auVar680._24_4_ | (uint)!bVar30 * auVar684._24_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
                 (uint)bVar33 * ((uint)bVar32 * auVar677._28_4_ | (uint)!bVar32 * auVar676._28_4_) |
                 (uint)!bVar33 *
                 ((uint)(bVar28 >> 7) * auVar680._28_4_ |
                 (uint)!(bool)(bVar28 >> 7) * auVar684._28_4_);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      if (iVar421 != 4) {
        return;
      }
      auVar730 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
      auVar657 = auVar730._0_32_;
      uVar424 = 0;
      if (3 < (int)uVar422) {
        auVar726 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar46 = vcmpps_avx512f(auVar730,auVar726,1);
        auVar712 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar713 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar840._0_4_ = (uint)bVar11 * auVar713._0_4_ | (uint)!bVar11 * auVar712._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar840._4_4_ = (uint)bVar11 * auVar713._4_4_ | (uint)!bVar11 * auVar712._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar840._8_4_ = (uint)bVar11 * auVar713._8_4_ | (uint)!bVar11 * auVar712._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar840._12_4_ = (uint)bVar11 * auVar713._12_4_ | (uint)!bVar11 * auVar712._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar840._16_4_ = (uint)bVar11 * auVar713._16_4_ | (uint)!bVar11 * auVar712._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar840._20_4_ = (uint)bVar11 * auVar713._20_4_ | (uint)!bVar11 * auVar712._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar840._24_4_ = (uint)bVar11 * auVar713._24_4_ | (uint)!bVar11 * auVar712._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        auVar840._28_4_ = (uint)bVar11 * auVar713._28_4_ | (uint)!bVar11 * auVar712._28_4_;
        bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
        auVar840._32_4_ = (uint)bVar11 * auVar713._32_4_ | (uint)!bVar11 * auVar712._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        auVar840._36_4_ = (uint)bVar11 * auVar713._36_4_ | (uint)!bVar11 * auVar712._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        auVar840._40_4_ = (uint)bVar11 * auVar713._40_4_ | (uint)!bVar11 * auVar712._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        auVar840._44_4_ = (uint)bVar11 * auVar713._44_4_ | (uint)!bVar11 * auVar712._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        auVar840._48_4_ = (uint)bVar11 * auVar713._48_4_ | (uint)!bVar11 * auVar712._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        auVar840._52_4_ = (uint)bVar11 * auVar713._52_4_ | (uint)!bVar11 * auVar712._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        auVar840._56_4_ = (uint)bVar11 * auVar713._56_4_ | (uint)!bVar11 * auVar712._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        auVar840._60_4_ = (uint)bVar11 * auVar713._60_4_ | (uint)!bVar11 * auVar712._60_4_;
        auVar712 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        auVar356._8_4_ = 0x80000000;
        auVar356._0_8_ = 0x8000000080000000;
        auVar356._12_4_ = 0x80000000;
        auVar356._16_4_ = 0x80000000;
        auVar356._20_4_ = 0x80000000;
        auVar356._24_4_ = 0x80000000;
        auVar356._28_4_ = 0x80000000;
        auVar356._32_4_ = 0x80000000;
        auVar356._36_4_ = 0x80000000;
        auVar356._40_4_ = 0x80000000;
        auVar356._44_4_ = 0x80000000;
        auVar356._48_4_ = 0x80000000;
        auVar356._52_4_ = 0x80000000;
        auVar356._56_4_ = 0x80000000;
        auVar356._60_4_ = 0x80000000;
        auVar712 = vpternlogd_avx512f(auVar712,auVar730,auVar356,0xf8);
        iVar421 = 3;
        uVar46 = vcmpps_avx512f(auVar730,auVar726,4);
        auVar713 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar725 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        do {
          auVar462 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
          auVar492 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
          auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar671 = vinsertf32x4_avx512vl(ZEXT1632(auVar462),auVar492,1);
          auVar462 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar672 = vinsertf32x4_avx512vl(ZEXT1632(auVar493),auVar462,1);
          auVar1755 = vinsertf64x4_avx512f(ZEXT3264(auVar672),auVar671,1);
          auVar732 = vdivps_avx512f(auVar730,auVar1755);
          auVar845 = vandps_avx512dq(auVar732,auVar714);
          uVar426 = vcmpps_avx512f(auVar715,auVar845,1);
          auVar357._8_4_ = 0xbf800000;
          auVar357._0_8_ = 0xbf800000bf800000;
          auVar357._12_4_ = 0xbf800000;
          auVar357._16_4_ = 0xbf800000;
          auVar357._20_4_ = 0xbf800000;
          auVar357._24_4_ = 0xbf800000;
          auVar357._28_4_ = 0xbf800000;
          auVar357._32_4_ = 0xbf800000;
          auVar357._36_4_ = 0xbf800000;
          auVar357._40_4_ = 0xbf800000;
          auVar357._44_4_ = 0xbf800000;
          auVar357._48_4_ = 0xbf800000;
          auVar357._52_4_ = 0xbf800000;
          auVar357._56_4_ = 0xbf800000;
          auVar357._60_4_ = 0xbf800000;
          auVar729 = vblendmps_avx512f(auVar845,auVar357);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar841._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * in_ZMM20._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar841._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * in_ZMM20._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar841._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * in_ZMM20._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar841._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * in_ZMM20._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar841._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * in_ZMM20._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar841._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * in_ZMM20._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar841._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * in_ZMM20._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar841._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * in_ZMM20._28_4_;
          bVar28 = (byte)(uVar426 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar841._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * in_ZMM20._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar841._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * in_ZMM20._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar841._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * in_ZMM20._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar841._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * in_ZMM20._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar841._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * in_ZMM20._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar841._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * in_ZMM20._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar841._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * in_ZMM20._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar841._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * in_ZMM20._60_4_;
          auVar845 = vmaxps_avx512f(auVar845,auVar715);
          auVar845 = vdivps_avx512f(auVar841,auVar845);
          in_ZMM20 = vmulps_avx512f(auVar845,auVar845);
          uVar427 = vcmpps_avx512f(auVar1755,auVar726,4);
          auVar729 = vmulps_avx512f(in_ZMM20,in_ZMM20);
          auVar727 = vfmadd213ps_avx512f(auVar716,auVar729,auVar717);
          auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar718);
          auVar728 = vfmadd213ps_avx512f(auVar720,auVar729,auVar721);
          auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar722);
          in_ZMM22 = vfmadd213ps_avx512f(auVar727,auVar729,auVar719);
          auVar727 = vfmadd213ps_avx512f(auVar728,auVar729,auVar723);
          auVar729 = vfmadd213ps_avx512f(auVar727,auVar729,auVar715);
          auVar729 = vfmadd231ps_avx512f(auVar729,in_ZMM20,in_ZMM22);
          uVar428 = vcmpps_avx512f(auVar1755,auVar726,1);
          auVar845 = vmulps_avx512f(auVar729,auVar845);
          auVar729 = vaddps_avx512f(auVar845,auVar724);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar842._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar842._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar845._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar842._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar845._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar842._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar845._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar842._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar845._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar842._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar845._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar842._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar845._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar842._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar845._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar842._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar845._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar842._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar845._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar842._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar845._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar842._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar845._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar842._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar845._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar842._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar845._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar842._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar845._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar842._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar845._60_4_;
          auVar1755 = vpternlogd_avx512f(auVar1755,auVar713,auVar725,0xea);
          auVar845 = vpternlogd_avx512f(auVar842,auVar732,auVar713,0xf8);
          uVar426 = vcmpps_avx512f(auVar1755,auVar726,1);
          auVar1755 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar729 = vaddps_avx512f(auVar845,auVar840);
          bVar11 = (bool)((byte)uVar428 & 1);
          auVar843._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_;
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          auVar843._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar845._4_4_;
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          auVar843._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar845._8_4_;
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar843._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar845._12_4_;
          bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
          auVar843._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar845._16_4_;
          bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
          auVar843._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar845._20_4_;
          bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
          auVar843._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar845._24_4_;
          bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
          auVar843._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar845._28_4_;
          bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
          auVar843._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar845._32_4_;
          bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
          auVar843._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar845._36_4_;
          bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
          auVar843._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar845._40_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
          auVar843._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar845._44_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
          auVar843._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar845._48_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
          auVar843._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar845._52_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
          auVar843._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar845._56_4_;
          bVar11 = SUB81(uVar428 >> 0xf,0);
          auVar843._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar845._60_4_;
          auVar845 = vblendmps_avx512f(auVar712,auVar843);
          bVar11 = (bool)((byte)uVar427 & 1);
          bVar13 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar427 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar427 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar427 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar427 >> 6) & 1);
          bVar19 = (bool)((byte)(uVar427 >> 7) & 1);
          bVar20 = (bool)((byte)(uVar427 >> 8) & 1);
          bVar21 = (bool)((byte)(uVar427 >> 9) & 1);
          bVar22 = (bool)((byte)(uVar427 >> 10) & 1);
          bVar23 = (bool)((byte)(uVar427 >> 0xb) & 1);
          bVar24 = (bool)((byte)(uVar427 >> 0xc) & 1);
          bVar25 = (bool)((byte)(uVar427 >> 0xd) & 1);
          bVar26 = (bool)((byte)(uVar427 >> 0xe) & 1);
          bVar27 = SUB81(uVar427 >> 0xf,0);
          bVar12 = (bool)((byte)uVar46 & 1);
          auVar657._0_4_ =
               (uint)bVar12 * ((uint)bVar11 * auVar845._0_4_ | (uint)!bVar11 * auVar732._0_4_) |
               (uint)!bVar12 * (uint)((byte)uVar426 & 1) * auVar1755._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar657._4_4_ =
               (uint)bVar11 * ((uint)bVar13 * auVar845._4_4_ | (uint)!bVar13 * auVar732._4_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 1) & 1) * auVar1755._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar657._8_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar845._8_4_ | (uint)!bVar14 * auVar732._8_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 2) & 1) * auVar1755._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar657._12_4_ =
               (uint)bVar11 * ((uint)bVar15 * auVar845._12_4_ | (uint)!bVar15 * auVar732._12_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 3) & 1) * auVar1755._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar657._16_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar845._16_4_ | (uint)!bVar16 * auVar732._16_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 4) & 1) * auVar1755._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar657._20_4_ =
               (uint)bVar11 * ((uint)bVar17 * auVar845._20_4_ | (uint)!bVar17 * auVar732._20_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 5) & 1) * auVar1755._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar657._24_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar845._24_4_ | (uint)!bVar18 * auVar732._24_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 6) & 1) * auVar1755._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar657._28_4_ =
               (uint)bVar11 * ((uint)bVar19 * auVar845._28_4_ | (uint)!bVar19 * auVar732._28_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 7) & 1) * auVar1755._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar844._32_4_ =
               (uint)bVar11 * ((uint)bVar20 * auVar845._32_4_ | (uint)!bVar20 * auVar732._32_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 8) & 1) * auVar1755._32_4_;
          auVar844._0_32_ = auVar657;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar844._36_4_ =
               (uint)bVar11 * ((uint)bVar21 * auVar845._36_4_ | (uint)!bVar21 * auVar732._36_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 9) & 1) * auVar1755._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar844._40_4_ =
               (uint)bVar11 * ((uint)bVar22 * auVar845._40_4_ | (uint)!bVar22 * auVar732._40_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 10) & 1) * auVar1755._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar844._44_4_ =
               (uint)bVar11 * ((uint)bVar23 * auVar845._44_4_ | (uint)!bVar23 * auVar732._44_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 0xb) & 1) * auVar1755._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar844._48_4_ =
               (uint)bVar11 * ((uint)bVar24 * auVar845._48_4_ | (uint)!bVar24 * auVar732._48_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 0xc) & 1) * auVar1755._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar844._52_4_ =
               (uint)bVar11 * ((uint)bVar25 * auVar845._52_4_ | (uint)!bVar25 * auVar732._52_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 0xd) & 1) * auVar1755._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar844._56_4_ =
               (uint)bVar11 * ((uint)bVar26 * auVar845._56_4_ | (uint)!bVar26 * auVar732._56_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar426 >> 0xe) & 1) * auVar1755._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar844._60_4_ =
               (uint)bVar11 * ((uint)bVar27 * auVar845._60_4_ | (uint)!bVar27 * auVar732._60_4_) |
               (uint)!bVar11 * (uint)(byte)(uVar426 >> 0xf) * auVar1755._60_4_;
          *(undefined1 (*) [64])outptr = auVar844;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      auVar462 = auVar730._0_16_;
      if ((int)(uVar424 | 1) < (int)uVar422) {
        auVar1000._16_16_ = auVar462;
        auVar1000._0_16_ = auVar462;
        auVar492 = ZEXT816(0) << 0x40;
        auVar199._8_4_ = 0x80000000;
        auVar199._0_8_ = 0x8000000080000000;
        auVar199._12_4_ = 0x80000000;
        auVar199._16_4_ = 0x80000000;
        auVar199._20_4_ = 0x80000000;
        auVar199._24_4_ = 0x80000000;
        auVar199._28_4_ = 0x80000000;
        vandps_avx512vl(auVar1000,auVar199);
        uVar46 = vcmpps_avx512vl(auVar1000,ZEXT1632(auVar492),4);
        uVar426 = vcmpps_avx512vl(auVar1000,ZEXT1632(auVar492),1);
        auVar671 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar658._0_4_ = (uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar658._4_4_ = (uint)bVar11 * auVar671._4_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar658._8_4_ = (uint)bVar11 * auVar671._8_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar658._12_4_ = (uint)bVar11 * auVar671._12_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar658._16_4_ = (uint)bVar11 * auVar671._16_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar658._20_4_ = (uint)bVar11 * auVar671._20_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar658._24_4_ = (uint)bVar11 * auVar671._24_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = SUB81(uVar426 >> 7,0);
        auVar658._28_4_ = (uint)bVar11 * auVar671._28_4_ | (uint)!bVar11 * 0x40490fdb;
        auVar200._8_4_ = 0x3fc90fdb;
        auVar200._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar200._12_4_ = 0x3fc90fdb;
        auVar200._16_4_ = 0x3fc90fdb;
        auVar200._20_4_ = 0x3fc90fdb;
        auVar200._24_4_ = 0x3fc90fdb;
        auVar200._28_4_ = 0x3fc90fdb;
        auVar671 = vorps_avx512vl(auVar657,auVar200);
        auVar659._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar671._4_4_;
        auVar659._0_4_ = (uint)((byte)uVar46 & 1) * auVar671._0_4_;
        auVar659._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar671._8_4_;
        auVar659._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar671._12_4_;
        auVar659._16_4_ = (uint)((byte)(uVar46 >> 4) & 1) * auVar671._16_4_;
        auVar659._20_4_ = (uint)((byte)(uVar46 >> 5) & 1) * auVar671._20_4_;
        auVar659._24_4_ = (uint)((byte)(uVar46 >> 6) & 1) * auVar671._24_4_;
        auVar659._28_4_ = (uint)(byte)(uVar46 >> 7) * auVar671._28_4_;
        auVar1251._8_4_ = 0x80000000;
        auVar1251._0_8_ = 0x8000000080000000;
        auVar1251._12_4_ = 0x80000000;
        auVar1251._16_4_ = 0x80000000;
        auVar1251._20_4_ = 0x80000000;
        auVar1251._24_4_ = 0x80000000;
        auVar1251._28_4_ = 0x80000000;
        auVar1310._8_4_ = 0x7fffffff;
        auVar1310._0_8_ = 0x7fffffff7fffffff;
        auVar1310._12_4_ = 0x7fffffff;
        auVar1310._16_4_ = 0x7fffffff;
        auVar1310._20_4_ = 0x7fffffff;
        auVar1310._24_4_ = 0x7fffffff;
        auVar1310._28_4_ = 0x7fffffff;
        auVar1366._8_4_ = 0x3f800000;
        auVar1366._0_8_ = 0x3f8000003f800000;
        auVar1366._12_4_ = 0x3f800000;
        auVar1366._16_4_ = 0x3f800000;
        auVar1366._20_4_ = 0x3f800000;
        auVar1366._24_4_ = 0x3f800000;
        auVar1366._28_4_ = 0x3f800000;
        auVar1423._8_4_ = 0xbc83a25c;
        auVar1423._0_8_ = 0xbc83a25cbc83a25c;
        auVar1423._12_4_ = 0xbc83a25c;
        auVar1423._16_4_ = 0xbc83a25c;
        auVar1423._20_4_ = 0xbc83a25c;
        auVar1423._24_4_ = 0xbc83a25c;
        auVar1423._28_4_ = 0xbc83a25c;
        auVar1477._8_4_ = 0xbd99b01e;
        auVar1477._0_8_ = 0xbd99b01ebd99b01e;
        auVar1477._12_4_ = 0xbd99b01e;
        auVar1477._16_4_ = 0xbd99b01e;
        auVar1477._20_4_ = 0xbd99b01e;
        auVar1477._24_4_ = 0xbd99b01e;
        auVar1477._28_4_ = 0xbd99b01e;
        auVar1531._8_4_ = 0xbe117200;
        auVar1531._0_8_ = 0xbe117200be117200;
        auVar1531._12_4_ = 0xbe117200;
        auVar1531._16_4_ = 0xbe117200;
        auVar1531._20_4_ = 0xbe117200;
        auVar1531._24_4_ = 0xbe117200;
        auVar1531._28_4_ = 0xbe117200;
        auVar1585._8_4_ = 0xbeaaaa53;
        auVar1585._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1585._12_4_ = 0xbeaaaa53;
        auVar1585._16_4_ = 0xbeaaaa53;
        auVar1585._20_4_ = 0xbeaaaa53;
        auVar1585._24_4_ = 0xbeaaaa53;
        auVar1585._28_4_ = 0xbeaaaa53;
        auVar1639._8_4_ = 0x3b3ac537;
        auVar1639._0_8_ = 0x3b3ac5373b3ac537;
        auVar1639._12_4_ = 0x3b3ac537;
        auVar1639._16_4_ = 0x3b3ac537;
        auVar1639._20_4_ = 0x3b3ac537;
        auVar1639._24_4_ = 0x3b3ac537;
        auVar1639._28_4_ = 0x3b3ac537;
        auVar1693._8_4_ = 0x3d2edd4e;
        auVar1693._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1693._12_4_ = 0x3d2edd4e;
        auVar1693._16_4_ = 0x3d2edd4e;
        auVar1693._20_4_ = 0x3d2edd4e;
        auVar1693._24_4_ = 0x3d2edd4e;
        auVar1693._28_4_ = 0x3d2edd4e;
        auVar1744._8_4_ = 0x3dd9ed24;
        auVar1744._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1744._12_4_ = 0x3dd9ed24;
        auVar1744._16_4_ = 0x3dd9ed24;
        auVar1744._20_4_ = 0x3dd9ed24;
        auVar1744._24_4_ = 0x3dd9ed24;
        auVar1744._28_4_ = 0x3dd9ed24;
        auVar1794._8_4_ = 0x3e4cb974;
        auVar1794._0_8_ = 0x3e4cb9743e4cb974;
        auVar1794._12_4_ = 0x3e4cb974;
        auVar1794._16_4_ = 0x3e4cb974;
        auVar1794._20_4_ = 0x3e4cb974;
        auVar1794._24_4_ = 0x3e4cb974;
        auVar1794._28_4_ = 0x3e4cb974;
        auVar671 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        auVar672 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
        auVar675 = vorps_avx512vl(auVar659,auVar672);
        uVar872 = uVar424;
        do {
          auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar516 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar684 = vinsertf32x4_avx512vl(ZEXT1632(auVar493),auVar516,1);
          auVar676 = vdivps_avx512vl(auVar1000,auVar684);
          vandps_avx512vl(auVar676,auVar1310);
          uVar426 = vcmpps_avx512vl(auVar1366,auVar676,1);
          auVar201._8_4_ = 0xbf800000;
          auVar201._0_8_ = 0xbf800000bf800000;
          auVar201._12_4_ = 0xbf800000;
          auVar201._16_4_ = 0xbf800000;
          auVar201._20_4_ = 0xbf800000;
          auVar201._24_4_ = 0xbf800000;
          auVar201._28_4_ = 0xbf800000;
          auVar677 = vblendmps_avx512vl(auVar676,auVar201);
          bVar28 = (byte)uVar426;
          auVar660._0_4_ =
               (uint)(bVar28 & 1) * auVar677._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar660._4_4_ = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar660._8_4_ = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar660._12_4_ = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar660._16_4_ = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar660._20_4_ = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar660._24_4_ = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar660._28_4_ = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
          auVar677 = vdivps_avx512vl(auVar660,auVar676);
          auVar661._0_4_ =
               (uint)(bVar28 & 1) * auVar677._0_4_ | !(bool)(bVar28 & 1) * auVar660._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar661._4_4_ = (uint)bVar11 * auVar677._4_4_ | !bVar11 * auVar660._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar661._8_4_ = (uint)bVar11 * auVar677._8_4_ | !bVar11 * auVar660._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar661._12_4_ = (uint)bVar11 * auVar677._12_4_ | !bVar11 * auVar660._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar661._16_4_ = (uint)bVar11 * auVar677._16_4_ | !bVar11 * auVar660._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar661._20_4_ = (uint)bVar11 * auVar677._20_4_ | !bVar11 * auVar660._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar661._24_4_ = (uint)bVar11 * auVar677._24_4_ | !bVar11 * auVar660._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar661._28_4_ = (uint)bVar11 * auVar677._28_4_ | !bVar11 * auVar660._28_4_;
          in_ZMM22 = ZEXT3264(auVar661);
          auVar677 = vmulps_avx512vl(auVar661,auVar661);
          auVar680 = vmulps_avx512vl(auVar677,auVar677);
          auVar562 = ZEXT1632(auVar492);
          uVar427 = vcmpps_avx512vl(auVar684,auVar562,4);
          uVar427 = uVar46 & uVar427;
          auVar681 = vfmadd213ps_avx512vl(auVar1423,auVar680,auVar1477);
          auVar681 = vfmadd213ps_avx512vl(auVar681,auVar680,auVar1531);
          auVar682 = vfmadd213ps_avx512vl(auVar1639,auVar680,auVar1693);
          auVar682 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1744);
          auVar682 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1794);
          auVar681 = vfmadd213ps_avx512vl(auVar681,auVar680,auVar1585);
          auVar680 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1366);
          auVar677 = vfmadd231ps_avx512vl(auVar680,auVar677,auVar681);
          auVar677 = vmulps_avx512vl(auVar677,auVar661);
          uVar428 = vcmpps_avx512vl(auVar684,auVar562,1);
          auVar680 = vaddps_avx512vl(auVar677,auVar671);
          auVar662._0_4_ =
               (uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar677._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar662._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * auVar677._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar662._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * auVar677._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar662._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * auVar677._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar662._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * auVar677._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar662._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * auVar677._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar662._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * auVar677._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar662._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * auVar677._28_4_;
          auVar676 = vpternlogd_avx512vl(auVar662,auVar676,auVar1251,0xf8);
          auVar684 = vpternlogd_avx512vl(auVar684,auVar672,auVar1251,0xec);
          auVar677 = vaddps_avx512vl(auVar676,auVar658);
          bVar11 = (bool)((byte)uVar428 & 1);
          bVar13 = (bool)((byte)(uVar428 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar428 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar428 >> 3) & 1);
          bVar22 = (bool)((byte)(uVar428 >> 4) & 1);
          bVar25 = (bool)((byte)(uVar428 >> 5) & 1);
          bVar29 = (bool)((byte)(uVar428 >> 6) & 1);
          bVar32 = SUB81(uVar428 >> 7,0);
          uVar45 = vcmpps_avx512vl(auVar562,auVar684,2);
          bVar28 = (byte)uVar46 | (byte)uVar45;
          auVar680 = vpblendmd_avx512vl(auVar675,auVar659);
          bVar14 = (bool)(bVar28 >> 1 & 1);
          bVar17 = (bool)(bVar28 >> 2 & 1);
          bVar20 = (bool)(bVar28 >> 3 & 1);
          bVar23 = (bool)(bVar28 >> 4 & 1);
          bVar26 = (bool)(bVar28 >> 5 & 1);
          bVar30 = (bool)(bVar28 >> 6 & 1);
          bVar12 = (bool)((byte)uVar427 & 1);
          bVar15 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar427 >> 3) & 1);
          bVar24 = (bool)((byte)(uVar427 >> 4) & 1);
          bVar27 = (bool)((byte)(uVar427 >> 5) & 1);
          bVar31 = (bool)((byte)(uVar427 >> 6) & 1);
          bVar33 = SUB81(uVar427 >> 7,0);
          *(uint *)*(undefined1 (*) [64])outptr =
               (uint)bVar12 * ((uint)bVar11 * auVar677._0_4_ | (uint)!bVar11 * auVar676._0_4_) |
               (uint)!bVar12 *
               ((uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar684._0_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
               (uint)bVar15 * ((uint)bVar13 * auVar677._4_4_ | (uint)!bVar13 * auVar676._4_4_) |
               (uint)!bVar15 * ((uint)bVar14 * auVar680._4_4_ | (uint)!bVar14 * auVar684._4_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
               (uint)bVar18 * ((uint)bVar16 * auVar677._8_4_ | (uint)!bVar16 * auVar676._8_4_) |
               (uint)!bVar18 * ((uint)bVar17 * auVar680._8_4_ | (uint)!bVar17 * auVar684._8_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
               (uint)bVar21 * ((uint)bVar19 * auVar677._12_4_ | (uint)!bVar19 * auVar676._12_4_) |
               (uint)!bVar21 * ((uint)bVar20 * auVar680._12_4_ | (uint)!bVar20 * auVar684._12_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
               (uint)bVar24 * ((uint)bVar22 * auVar677._16_4_ | (uint)!bVar22 * auVar676._16_4_) |
               (uint)!bVar24 * ((uint)bVar23 * auVar680._16_4_ | (uint)!bVar23 * auVar684._16_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
               (uint)bVar27 * ((uint)bVar25 * auVar677._20_4_ | (uint)!bVar25 * auVar676._20_4_) |
               (uint)!bVar27 * ((uint)bVar26 * auVar680._20_4_ | (uint)!bVar26 * auVar684._20_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
               (uint)bVar31 * ((uint)bVar29 * auVar677._24_4_ | (uint)!bVar29 * auVar676._24_4_) |
               (uint)!bVar31 * ((uint)bVar30 * auVar680._24_4_ | (uint)!bVar30 * auVar684._24_4_);
          *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
               (uint)bVar33 * ((uint)bVar32 * auVar677._28_4_ | (uint)!bVar32 * auVar676._28_4_) |
               (uint)!bVar33 *
               ((uint)(bVar28 >> 7) * auVar680._28_4_ | (uint)!(bool)(bVar28 >> 7) * auVar684._28_4_
               );
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar424 = uVar872 + 2;
          iVar421 = uVar872 + 3;
          uVar872 = uVar424;
        } while (iVar421 < (int)uVar422);
      }
      if ((int)uVar422 <= (int)uVar424) {
        return;
      }
      auVar516 = ZEXT816(0) << 0x40;
      auVar70._8_4_ = 0x80000000;
      auVar70._0_8_ = 0x8000000080000000;
      auVar70._12_4_ = 0x80000000;
      auVar492 = vpandd_avx512vl(auVar462,auVar70);
      uVar46 = vcmpps_avx512vl(auVar462,auVar516,1);
      auVar493 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
      bVar11 = (bool)((byte)uVar46 & 1);
      auVar547._0_4_ = (uint)bVar11 * auVar493._0_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
      auVar547._4_4_ = (uint)bVar11 * auVar493._4_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
      auVar547._8_4_ = (uint)bVar11 * auVar493._8_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar547._12_4_ = (uint)bVar11 * auVar493._12_4_ | (uint)!bVar11 * 0x40490fdb;
      uVar46 = vcmpps_avx512vl(auVar462,auVar516,4);
      auVar71._8_4_ = 0x3fc90fdb;
      auVar71._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar71._12_4_ = 0x3fc90fdb;
      auVar492 = vpord_avx512vl(auVar492,auVar71);
      auVar548._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar492._4_4_;
      auVar548._0_4_ = (uint)((byte)uVar46 & 1) * auVar492._0_4_;
      auVar548._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar492._8_4_;
      auVar548._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar492._12_4_;
      lVar425 = 0;
      auVar1170._8_4_ = 0x80000000;
      auVar1170._0_8_ = 0x8000000080000000;
      auVar1170._12_4_ = 0x80000000;
      auVar1225._8_4_ = 0x7fffffff;
      auVar1225._0_8_ = 0x7fffffff7fffffff;
      auVar1225._12_4_ = 0x7fffffff;
      auVar1287._8_4_ = 0x3f800000;
      auVar1287._0_8_ = 0x3f8000003f800000;
      auVar1287._12_4_ = 0x3f800000;
      auVar1346._8_4_ = 0xbc83a25c;
      auVar1346._0_8_ = 0xbc83a25cbc83a25c;
      auVar1346._12_4_ = 0xbc83a25c;
      auVar1402._8_4_ = 0xbd99b01e;
      auVar1402._0_8_ = 0xbd99b01ebd99b01e;
      auVar1402._12_4_ = 0xbd99b01e;
      auVar1456._8_4_ = 0xbe117200;
      auVar1456._0_8_ = 0xbe117200be117200;
      auVar1456._12_4_ = 0xbe117200;
      auVar1510._8_4_ = 0xbeaaaa53;
      auVar1510._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1510._12_4_ = 0xbeaaaa53;
      auVar1564._8_4_ = 0x3b3ac537;
      auVar1564._0_8_ = 0x3b3ac5373b3ac537;
      auVar1564._12_4_ = 0x3b3ac537;
      auVar1618._8_4_ = 0x3d2edd4e;
      auVar1618._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1618._12_4_ = 0x3d2edd4e;
      auVar1672._8_4_ = 0x3dd9ed24;
      auVar1672._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1672._12_4_ = 0x3dd9ed24;
      auVar1725._8_4_ = 0x3e4cb974;
      auVar1725._0_8_ = 0x3e4cb9743e4cb974;
      auVar1725._12_4_ = 0x3e4cb974;
      auVar1776._8_4_ = 0x3fc90fdb;
      auVar1776._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1776._12_4_ = 0x3fc90fdb;
      auVar492 = vpbroadcastd_avx512vl(ZEXT416(0x40490fdb));
      auVar493 = vpord_avx512vl(auVar548,auVar492);
      do {
        auVar504 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[lVar425]));
        auVar496 = vdivss_avx512f(ZEXT416(0x3f800000),auVar504);
        auVar496 = vbroadcastss_avx512vl(auVar496);
        auVar496 = vmulps_avx512vl(auVar462,auVar496);
        auVar497 = vandps_avx512vl(auVar496,auVar1225);
        uVar426 = vcmpps_avx512vl(auVar1287,auVar497,1);
        auVar72._8_4_ = 0xbf800000;
        auVar72._0_8_ = 0xbf800000bf800000;
        auVar72._12_4_ = 0xbf800000;
        auVar498 = vblendmps_avx512vl(auVar497,auVar72);
        bVar28 = (byte)uVar426;
        auVar549._0_4_ =
             (uint)(bVar28 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar549._4_4_ = (uint)bVar11 * auVar498._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar549._8_4_ = (uint)bVar11 * auVar498._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar549._12_4_ = (uint)bVar11 * auVar498._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
        uVar427 = vcmpps_avx512vl(auVar504,auVar516,4);
        uVar427 = uVar46 & uVar427;
        auVar497 = vdivps_avx512vl(auVar549,auVar497);
        auVar550._0_4_ = (uint)(bVar28 & 1) * auVar497._0_4_ | !(bool)(bVar28 & 1) * auVar549._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar550._4_4_ = (uint)bVar11 * auVar497._4_4_ | !bVar11 * auVar549._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar550._8_4_ = (uint)bVar11 * auVar497._8_4_ | !bVar11 * auVar549._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar550._12_4_ = (uint)bVar11 * auVar497._12_4_ | !bVar11 * auVar549._12_4_;
        in_ZMM22 = ZEXT1664(auVar550);
        auVar497 = vmulps_avx512vl(auVar550,auVar550);
        auVar498 = vmulps_avx512vl(auVar497,auVar497);
        uVar428 = vcmpps_avx512vl(auVar504,auVar516,1);
        auVar501 = vfmadd213ps_avx512vl(auVar1346,auVar498,auVar1402);
        auVar501 = vfmadd213ps_avx512vl(auVar501,auVar498,auVar1456);
        auVar502 = vfmadd213ps_avx512vl(auVar1564,auVar498,auVar1618);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1672);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1725);
        auVar501 = vfmadd213ps_avx512vl(auVar501,auVar498,auVar1510);
        auVar498 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1287);
        auVar497 = vfmadd231ps_avx512vl(auVar498,auVar497,auVar501);
        auVar497 = vmulps_avx512vl(auVar497,auVar550);
        auVar498 = vaddps_avx512vl(auVar497,auVar1776);
        auVar551._0_4_ =
             (uint)(bVar28 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar497._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar551._4_4_ = (uint)bVar11 * auVar498._4_4_ | (uint)!bVar11 * auVar497._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar551._8_4_ = (uint)bVar11 * auVar498._8_4_ | (uint)!bVar11 * auVar497._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar551._12_4_ = (uint)bVar11 * auVar498._12_4_ | (uint)!bVar11 * auVar497._12_4_;
        auVar496 = vpternlogd_avx512vl(auVar551,auVar496,auVar1170,0xf8);
        auVar504 = vpternlogd_avx512vl(auVar504,auVar492,auVar1170,0xec);
        uVar45 = vcmpps_avx512vl(auVar516,auVar504,2);
        auVar497 = vaddps_avx512vl(auVar496,auVar547);
        bVar11 = (bool)((byte)uVar428 & 1);
        bVar14 = (bool)((byte)(uVar428 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar428 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar428 >> 3) & 1);
        uVar47 = (ushort)uVar46 | (ushort)uVar45;
        auVar498 = vpblendmd_avx512vl(auVar493,auVar548);
        bVar12 = (bool)((byte)uVar47 & 1);
        bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar47 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar47 >> 3) & 1);
        bVar13 = (bool)((byte)uVar427 & 1);
        bVar16 = (bool)((byte)(uVar427 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar427 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar427 >> 3) & 1);
        *(uint *)*(undefined1 (*) [64])outptr =
             (uint)bVar13 * ((uint)bVar11 * auVar497._0_4_ | (uint)!bVar11 * auVar496._0_4_) |
             (uint)!bVar13 * ((uint)bVar12 * auVar498._0_4_ | (uint)!bVar12 * auVar504._0_4_);
        *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
             (uint)bVar16 * ((uint)bVar14 * auVar497._4_4_ | (uint)!bVar14 * auVar496._4_4_) |
             (uint)!bVar16 * ((uint)bVar15 * auVar498._4_4_ | (uint)!bVar15 * auVar504._4_4_);
        *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
             (uint)bVar19 * ((uint)bVar17 * auVar497._8_4_ | (uint)!bVar17 * auVar496._8_4_) |
             (uint)!bVar19 * ((uint)bVar18 * auVar498._8_4_ | (uint)!bVar18 * auVar504._8_4_);
        *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
             (uint)bVar22 * ((uint)bVar20 * auVar497._12_4_ | (uint)!bVar20 * auVar496._12_4_) |
             (uint)!bVar22 * ((uint)bVar21 * auVar498._12_4_ | (uint)!bVar21 * auVar504._12_4_);
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
        lVar425 = lVar425 + 1;
      } while (uVar422 - uVar424 != (int)lVar425);
      return;
    }
    if (aw == bw) {
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar713 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar725 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar1755 = ZEXT864(0);
        auVar726 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        auVar730 = in_ZMM20;
        do {
          auVar732 = *(undefined1 (*) [64])ptr;
          auVar845 = *(undefined1 (*) [64])ptr1;
          auVar729 = vdivps_avx512f(auVar732,auVar845);
          uVar46 = vcmpps_avx512f(auVar732,auVar1755,1);
          auVar727 = vandps_avx512dq(auVar729,auVar714);
          auVar338._8_4_ = 0xc0490fdb;
          auVar338._0_8_ = 0xc0490fdbc0490fdb;
          auVar338._12_4_ = 0xc0490fdb;
          auVar338._16_4_ = 0xc0490fdb;
          auVar338._20_4_ = 0xc0490fdb;
          auVar338._24_4_ = 0xc0490fdb;
          auVar338._28_4_ = 0xc0490fdb;
          auVar338._32_4_ = 0xc0490fdb;
          auVar338._36_4_ = 0xc0490fdb;
          auVar338._40_4_ = 0xc0490fdb;
          auVar338._44_4_ = 0xc0490fdb;
          auVar338._48_4_ = 0xc0490fdb;
          auVar338._52_4_ = 0xc0490fdb;
          auVar338._56_4_ = 0xc0490fdb;
          auVar338._60_4_ = 0xc0490fdb;
          auVar728 = vblendmps_avx512f(auVar713,auVar338);
          bVar11 = (bool)((byte)uVar46 & 1);
          in_ZMM20._0_4_ = (uint)bVar11 * auVar728._0_4_ | (uint)!bVar11 * auVar730._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          in_ZMM20._4_4_ = (uint)bVar11 * auVar728._4_4_ | (uint)!bVar11 * auVar730._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          in_ZMM20._8_4_ = (uint)bVar11 * auVar728._8_4_ | (uint)!bVar11 * auVar730._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          in_ZMM20._12_4_ = (uint)bVar11 * auVar728._12_4_ | (uint)!bVar11 * auVar730._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          in_ZMM20._16_4_ = (uint)bVar11 * auVar728._16_4_ | (uint)!bVar11 * auVar730._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          in_ZMM20._20_4_ = (uint)bVar11 * auVar728._20_4_ | (uint)!bVar11 * auVar730._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          in_ZMM20._24_4_ = (uint)bVar11 * auVar728._24_4_ | (uint)!bVar11 * auVar730._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          in_ZMM20._28_4_ = (uint)bVar11 * auVar728._28_4_ | (uint)!bVar11 * auVar730._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          in_ZMM20._32_4_ = (uint)bVar11 * auVar728._32_4_ | (uint)!bVar11 * auVar730._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          in_ZMM20._36_4_ = (uint)bVar11 * auVar728._36_4_ | (uint)!bVar11 * auVar730._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          in_ZMM20._40_4_ = (uint)bVar11 * auVar728._40_4_ | (uint)!bVar11 * auVar730._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          in_ZMM20._44_4_ = (uint)bVar11 * auVar728._44_4_ | (uint)!bVar11 * auVar730._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          in_ZMM20._48_4_ = (uint)bVar11 * auVar728._48_4_ | (uint)!bVar11 * auVar730._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          in_ZMM20._52_4_ = (uint)bVar11 * auVar728._52_4_ | (uint)!bVar11 * auVar730._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          in_ZMM20._56_4_ = (uint)bVar11 * auVar728._56_4_ | (uint)!bVar11 * auVar730._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          in_ZMM20._60_4_ = (uint)bVar11 * auVar728._60_4_ | (uint)!bVar11 * auVar730._60_4_;
          uVar46 = vcmpps_avx512f(auVar715,auVar727,1);
          auVar339._8_4_ = 0xbf800000;
          auVar339._0_8_ = 0xbf800000bf800000;
          auVar339._12_4_ = 0xbf800000;
          auVar339._16_4_ = 0xbf800000;
          auVar339._20_4_ = 0xbf800000;
          auVar339._24_4_ = 0xbf800000;
          auVar339._28_4_ = 0xbf800000;
          auVar339._32_4_ = 0xbf800000;
          auVar339._36_4_ = 0xbf800000;
          auVar339._40_4_ = 0xbf800000;
          auVar339._44_4_ = 0xbf800000;
          auVar339._48_4_ = 0xbf800000;
          auVar339._52_4_ = 0xbf800000;
          auVar339._56_4_ = 0xbf800000;
          auVar339._60_4_ = 0xbf800000;
          auVar730 = vblendmps_avx512f(auVar727,auVar339);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar741._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar741._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar741._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar741._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar741._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar741._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar741._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar741._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
          bVar28 = (byte)(uVar46 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar741._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * in_ZMM21._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar741._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * in_ZMM21._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar741._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * in_ZMM21._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar741._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * in_ZMM21._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar741._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * in_ZMM21._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar741._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * in_ZMM21._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar741._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * in_ZMM21._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar741._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * in_ZMM21._60_4_;
          auVar730 = vmaxps_avx512f(auVar727,auVar715);
          auVar730 = vdivps_avx512f(auVar741,auVar730);
          uVar426 = vcmpps_avx512f(auVar845,auVar1755,4);
          in_ZMM21 = vmulps_avx512f(auVar730,auVar730);
          uVar427 = vcmpps_avx512f(auVar732,auVar1755,4);
          auVar727 = vmulps_avx512f(in_ZMM21,in_ZMM21);
          auVar728 = vfmadd213ps_avx512f(auVar716,auVar727,auVar717);
          auVar728 = vfmadd213ps_avx512f(auVar728,auVar727,auVar718);
          auVar731 = vfmadd213ps_avx512f(auVar720,auVar727,auVar721);
          auVar731 = vfmadd213ps_avx512f(auVar731,auVar727,auVar722);
          auVar728 = vfmadd213ps_avx512f(auVar728,auVar727,auVar719);
          auVar731 = vfmadd213ps_avx512f(auVar731,auVar727,auVar723);
          auVar727 = vfmadd213ps_avx512f(auVar731,auVar727,auVar715);
          auVar727 = vfmadd231ps_avx512f(auVar727,in_ZMM21,auVar728);
          uVar428 = vcmpps_avx512f(auVar845,auVar1755,1);
          auVar730 = vmulps_avx512f(auVar727,auVar730);
          auVar727 = vaddps_avx512f(auVar730,auVar724);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar742._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar730._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar742._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar730._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar742._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar730._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar742._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar730._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar742._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar730._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar742._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar730._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar742._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar730._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar742._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar730._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar742._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar730._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar742._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar730._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar742._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar730._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar742._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar730._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar742._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar730._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar742._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar730._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar742._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar730._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar742._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar730._60_4_;
          auVar730 = vpternlogd_avx512f(auVar742,auVar729,auVar712,0xf8);
          auVar729 = vaddps_avx512f(auVar730,in_ZMM20);
          bVar11 = (bool)((byte)uVar428 & 1);
          bVar14 = (bool)((byte)(uVar428 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar428 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar428 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar428 >> 4) & 1);
          bVar22 = (bool)((byte)(uVar428 >> 5) & 1);
          bVar24 = (bool)((byte)(uVar428 >> 6) & 1);
          bVar26 = (bool)((byte)(uVar428 >> 7) & 1);
          bVar29 = (bool)((byte)(uVar428 >> 8) & 1);
          bVar31 = (bool)((byte)(uVar428 >> 9) & 1);
          bVar33 = (bool)((byte)(uVar428 >> 10) & 1);
          bVar35 = (bool)((byte)(uVar428 >> 0xb) & 1);
          bVar37 = (bool)((byte)(uVar428 >> 0xc) & 1);
          bVar39 = (bool)((byte)(uVar428 >> 0xd) & 1);
          bVar41 = (bool)((byte)(uVar428 >> 0xe) & 1);
          bVar43 = SUB81(uVar428 >> 0xf,0);
          auVar845 = vpternlogd_avx512f(auVar845,auVar712,auVar725,0xea);
          uVar46 = vcmpps_avx512f(auVar845,auVar1755,1);
          auVar732 = vpternlogd_avx512f(auVar732,auVar712,auVar726,0xea);
          bVar12 = (bool)((byte)uVar426 & 1);
          bVar15 = (bool)((byte)(uVar426 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar426 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar426 >> 3) & 1);
          bVar21 = (bool)((byte)(uVar426 >> 4) & 1);
          bVar23 = (bool)((byte)(uVar426 >> 5) & 1);
          bVar25 = (bool)((byte)(uVar426 >> 6) & 1);
          bVar27 = (bool)((byte)(uVar426 >> 7) & 1);
          bVar30 = (bool)((byte)(uVar426 >> 8) & 1);
          bVar32 = (bool)((byte)(uVar426 >> 9) & 1);
          bVar34 = (bool)((byte)(uVar426 >> 10) & 1);
          bVar36 = (bool)((byte)(uVar426 >> 0xb) & 1);
          bVar38 = (bool)((byte)(uVar426 >> 0xc) & 1);
          bVar40 = (bool)((byte)(uVar426 >> 0xd) & 1);
          bVar42 = (bool)((byte)(uVar426 >> 0xe) & 1);
          bVar44 = SUB81(uVar426 >> 0xf,0);
          bVar13 = (bool)((byte)uVar427 & 1);
          auVar743._0_4_ =
               (uint)bVar13 *
               ((uint)bVar12 * ((uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_) |
               (uint)!bVar12 * auVar732._0_4_) |
               (uint)!bVar13 * (uint)((byte)uVar46 & 1) * auVar713._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar743._4_4_ =
               (uint)bVar11 *
               ((uint)bVar15 * ((uint)bVar14 * auVar729._4_4_ | (uint)!bVar14 * auVar730._4_4_) |
               (uint)!bVar15 * auVar732._4_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 1) & 1) * auVar713._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar743._8_4_ =
               (uint)bVar11 *
               ((uint)bVar17 * ((uint)bVar16 * auVar729._8_4_ | (uint)!bVar16 * auVar730._8_4_) |
               (uint)!bVar17 * auVar732._8_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 2) & 1) * auVar713._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar743._12_4_ =
               (uint)bVar11 *
               ((uint)bVar19 * ((uint)bVar18 * auVar729._12_4_ | (uint)!bVar18 * auVar730._12_4_) |
               (uint)!bVar19 * auVar732._12_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 3) & 1) * auVar713._12_4_;
          bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
          auVar743._16_4_ =
               (uint)bVar11 *
               ((uint)bVar21 * ((uint)bVar20 * auVar729._16_4_ | (uint)!bVar20 * auVar730._16_4_) |
               (uint)!bVar21 * auVar732._16_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 4) & 1) * auVar713._16_4_;
          bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
          auVar743._20_4_ =
               (uint)bVar11 *
               ((uint)bVar23 * ((uint)bVar22 * auVar729._20_4_ | (uint)!bVar22 * auVar730._20_4_) |
               (uint)!bVar23 * auVar732._20_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 5) & 1) * auVar713._20_4_;
          bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
          auVar743._24_4_ =
               (uint)bVar11 *
               ((uint)bVar25 * ((uint)bVar24 * auVar729._24_4_ | (uint)!bVar24 * auVar730._24_4_) |
               (uint)!bVar25 * auVar732._24_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 6) & 1) * auVar713._24_4_;
          bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
          auVar743._28_4_ =
               (uint)bVar11 *
               ((uint)bVar27 * ((uint)bVar26 * auVar729._28_4_ | (uint)!bVar26 * auVar730._28_4_) |
               (uint)!bVar27 * auVar732._28_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 7) & 1) * auVar713._28_4_;
          bVar11 = (bool)((byte)(uVar427 >> 8) & 1);
          auVar743._32_4_ =
               (uint)bVar11 *
               ((uint)bVar30 * ((uint)bVar29 * auVar729._32_4_ | (uint)!bVar29 * auVar730._32_4_) |
               (uint)!bVar30 * auVar732._32_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 8) & 1) * auVar713._32_4_;
          bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
          auVar743._36_4_ =
               (uint)bVar11 *
               ((uint)bVar32 * ((uint)bVar31 * auVar729._36_4_ | (uint)!bVar31 * auVar730._36_4_) |
               (uint)!bVar32 * auVar732._36_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 9) & 1) * auVar713._36_4_;
          bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
          auVar743._40_4_ =
               (uint)bVar11 *
               ((uint)bVar34 * ((uint)bVar33 * auVar729._40_4_ | (uint)!bVar33 * auVar730._40_4_) |
               (uint)!bVar34 * auVar732._40_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 10) & 1) * auVar713._40_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
          auVar743._44_4_ =
               (uint)bVar11 *
               ((uint)bVar36 * ((uint)bVar35 * auVar729._44_4_ | (uint)!bVar35 * auVar730._44_4_) |
               (uint)!bVar36 * auVar732._44_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xb) & 1) * auVar713._44_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
          auVar743._48_4_ =
               (uint)bVar11 *
               ((uint)bVar38 * ((uint)bVar37 * auVar729._48_4_ | (uint)!bVar37 * auVar730._48_4_) |
               (uint)!bVar38 * auVar732._48_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xc) & 1) * auVar713._48_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
          auVar743._52_4_ =
               (uint)bVar11 *
               ((uint)bVar40 * ((uint)bVar39 * auVar729._52_4_ | (uint)!bVar39 * auVar730._52_4_) |
               (uint)!bVar40 * auVar732._52_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xd) & 1) * auVar713._52_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
          auVar743._56_4_ =
               (uint)bVar11 *
               ((uint)bVar42 * ((uint)bVar41 * auVar729._56_4_ | (uint)!bVar41 * auVar730._56_4_) |
               (uint)!bVar42 * auVar732._56_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xe) & 1) * auVar713._56_4_;
          bVar11 = SUB81(uVar427 >> 0xf,0);
          auVar743._60_4_ =
               (uint)bVar11 *
               ((uint)bVar44 * ((uint)bVar43 * auVar729._60_4_ | (uint)!bVar43 * auVar730._60_4_) |
               (uint)!bVar44 * auVar732._60_4_) |
               (uint)!bVar11 * (uint)(byte)(uVar46 >> 0xf) * auVar713._60_4_;
          ptr = (float *)((long)ptr + 0x40);
          *(undefined1 (*) [64])outptr = auVar743;
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
          auVar730 = in_ZMM20;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      if ((int)(uVar422 | 7) < (int)uVar424) {
        auVar962._8_4_ = 0x80000000;
        auVar962._0_8_ = 0x8000000080000000;
        auVar962._12_4_ = 0x80000000;
        auVar962._16_4_ = 0x80000000;
        auVar962._20_4_ = 0x80000000;
        auVar962._24_4_ = 0x80000000;
        auVar962._28_4_ = 0x80000000;
        auVar1040._8_4_ = 0x40490fdb;
        auVar1040._0_8_ = 0x40490fdb40490fdb;
        auVar1040._12_4_ = 0x40490fdb;
        auVar1040._16_4_ = 0x40490fdb;
        auVar1040._20_4_ = 0x40490fdb;
        auVar1040._24_4_ = 0x40490fdb;
        auVar1040._28_4_ = 0x40490fdb;
        auVar1113._8_4_ = 0x7fffffff;
        auVar1113._0_8_ = 0x7fffffff7fffffff;
        auVar1113._12_4_ = 0x7fffffff;
        auVar1113._16_4_ = 0x7fffffff;
        auVar1113._20_4_ = 0x7fffffff;
        auVar1113._24_4_ = 0x7fffffff;
        auVar1113._28_4_ = 0x7fffffff;
        auVar1173._8_4_ = 0x3f800000;
        auVar1173._0_8_ = 0x3f8000003f800000;
        auVar1173._12_4_ = 0x3f800000;
        auVar1173._16_4_ = 0x3f800000;
        auVar1173._20_4_ = 0x3f800000;
        auVar1173._24_4_ = 0x3f800000;
        auVar1173._28_4_ = 0x3f800000;
        auVar1228._8_4_ = 0xbc83a25c;
        auVar1228._0_8_ = 0xbc83a25cbc83a25c;
        auVar1228._12_4_ = 0xbc83a25c;
        auVar1228._16_4_ = 0xbc83a25c;
        auVar1228._20_4_ = 0xbc83a25c;
        auVar1228._24_4_ = 0xbc83a25c;
        auVar1228._28_4_ = 0xbc83a25c;
        auVar1290._8_4_ = 0xbd99b01e;
        auVar1290._0_8_ = 0xbd99b01ebd99b01e;
        auVar1290._12_4_ = 0xbd99b01e;
        auVar1290._16_4_ = 0xbd99b01e;
        auVar1290._20_4_ = 0xbd99b01e;
        auVar1290._24_4_ = 0xbd99b01e;
        auVar1290._28_4_ = 0xbd99b01e;
        auVar1349._8_4_ = 0xbe117200;
        auVar1349._0_8_ = 0xbe117200be117200;
        auVar1349._12_4_ = 0xbe117200;
        auVar1349._16_4_ = 0xbe117200;
        auVar1349._20_4_ = 0xbe117200;
        auVar1349._24_4_ = 0xbe117200;
        auVar1349._28_4_ = 0xbe117200;
        auVar1405._8_4_ = 0xbeaaaa53;
        auVar1405._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1405._12_4_ = 0xbeaaaa53;
        auVar1405._16_4_ = 0xbeaaaa53;
        auVar1405._20_4_ = 0xbeaaaa53;
        auVar1405._24_4_ = 0xbeaaaa53;
        auVar1405._28_4_ = 0xbeaaaa53;
        auVar1459._8_4_ = 0x3b3ac537;
        auVar1459._0_8_ = 0x3b3ac5373b3ac537;
        auVar1459._12_4_ = 0x3b3ac537;
        auVar1459._16_4_ = 0x3b3ac537;
        auVar1459._20_4_ = 0x3b3ac537;
        auVar1459._24_4_ = 0x3b3ac537;
        auVar1459._28_4_ = 0x3b3ac537;
        auVar1513._8_4_ = 0x3d2edd4e;
        auVar1513._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1513._12_4_ = 0x3d2edd4e;
        auVar1513._16_4_ = 0x3d2edd4e;
        auVar1513._20_4_ = 0x3d2edd4e;
        auVar1513._24_4_ = 0x3d2edd4e;
        auVar1513._28_4_ = 0x3d2edd4e;
        auVar1567._8_4_ = 0x3dd9ed24;
        auVar1567._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1567._12_4_ = 0x3dd9ed24;
        auVar1567._16_4_ = 0x3dd9ed24;
        auVar1567._20_4_ = 0x3dd9ed24;
        auVar1567._24_4_ = 0x3dd9ed24;
        auVar1567._28_4_ = 0x3dd9ed24;
        auVar1621._8_4_ = 0x3e4cb974;
        auVar1621._0_8_ = 0x3e4cb9743e4cb974;
        auVar1621._12_4_ = 0x3e4cb974;
        auVar1621._16_4_ = 0x3e4cb974;
        auVar1621._20_4_ = 0x3e4cb974;
        auVar1621._24_4_ = 0x3e4cb974;
        auVar1621._28_4_ = 0x3e4cb974;
        auVar1675._8_4_ = 0x3fc90fdb;
        auVar1675._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1675._12_4_ = 0x3fc90fdb;
        auVar1675._16_4_ = 0x3fc90fdb;
        auVar1675._20_4_ = 0x3fc90fdb;
        auVar1675._24_4_ = 0x3fc90fdb;
        auVar1675._28_4_ = 0x3fc90fdb;
        auVar1728._8_4_ = 0x40490fdb;
        auVar1728._0_8_ = 0x40490fdb40490fdb;
        auVar1728._12_4_ = 0x40490fdb;
        auVar1728._16_4_ = 0x40490fdb;
        auVar1728._20_4_ = 0x40490fdb;
        auVar1728._24_4_ = 0x40490fdb;
        auVar1728._28_4_ = 0x40490fdb;
        auVar1779._8_4_ = 0x3fc90fdb;
        auVar1779._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1779._12_4_ = 0x3fc90fdb;
        auVar1779._16_4_ = 0x3fc90fdb;
        auVar1779._20_4_ = 0x3fc90fdb;
        auVar1779._24_4_ = 0x3fc90fdb;
        auVar1779._28_4_ = 0x3fc90fdb;
        uVar872 = uVar422;
        do {
          auVar671 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
          auVar672 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1;
          auVar675 = vdivps_avx512vl(auVar671,auVar672);
          auVar681 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          uVar46 = vcmpps_avx512vl(auVar671,auVar681,1);
          vandps_avx512vl(auVar675,auVar1113);
          auVar183._8_4_ = 0xc0490fdb;
          auVar183._0_8_ = 0xc0490fdbc0490fdb;
          auVar183._12_4_ = 0xc0490fdb;
          auVar183._16_4_ = 0xc0490fdb;
          auVar183._20_4_ = 0xc0490fdb;
          auVar183._24_4_ = 0xc0490fdb;
          auVar183._28_4_ = 0xc0490fdb;
          auVar684 = vblendmps_avx512vl(auVar1040,auVar183);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar574._0_4_ = (uint)bVar11 * auVar684._0_4_ | (uint)!bVar11 * in_ZMM20._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar574._4_4_ = (uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * in_ZMM20._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar574._8_4_ = (uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * in_ZMM20._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar574._12_4_ = (uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * in_ZMM20._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar574._16_4_ = (uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * in_ZMM20._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar574._20_4_ = (uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * in_ZMM20._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar574._24_4_ = (uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * in_ZMM20._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar574._28_4_ = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * in_ZMM20._28_4_;
          in_ZMM20 = ZEXT3264(auVar574);
          uVar46 = vcmpps_avx512vl(auVar1173,auVar675,1);
          auVar184._8_4_ = 0xbf800000;
          auVar184._0_8_ = 0xbf800000bf800000;
          auVar184._12_4_ = 0xbf800000;
          auVar184._16_4_ = 0xbf800000;
          auVar184._20_4_ = 0xbf800000;
          auVar184._24_4_ = 0xbf800000;
          auVar184._28_4_ = 0xbf800000;
          auVar684 = vblendmps_avx512vl(auVar675,auVar184);
          bVar28 = (byte)uVar46;
          auVar575._0_4_ =
               (uint)(bVar28 & 1) * auVar684._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar575._4_4_ = (uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar575._8_4_ = (uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar575._12_4_ = (uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar575._16_4_ = (uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar575._20_4_ = (uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar575._24_4_ = (uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar575._28_4_ = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
          auVar684 = vdivps_avx512vl(auVar575,auVar675);
          auVar576._0_4_ =
               (uint)(bVar28 & 1) * auVar684._0_4_ | !(bool)(bVar28 & 1) * auVar575._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar576._4_4_ = (uint)bVar11 * auVar684._4_4_ | !bVar11 * auVar575._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar576._8_4_ = (uint)bVar11 * auVar684._8_4_ | !bVar11 * auVar575._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar576._12_4_ = (uint)bVar11 * auVar684._12_4_ | !bVar11 * auVar575._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar576._16_4_ = (uint)bVar11 * auVar684._16_4_ | !bVar11 * auVar575._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar576._20_4_ = (uint)bVar11 * auVar684._20_4_ | !bVar11 * auVar575._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar576._24_4_ = (uint)bVar11 * auVar684._24_4_ | !bVar11 * auVar575._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar576._28_4_ = (uint)bVar11 * auVar684._28_4_ | !bVar11 * auVar575._28_4_;
          in_ZMM21 = ZEXT3264(auVar576);
          uVar426 = vcmpps_avx512vl(auVar671,auVar681,4);
          auVar684 = vmulps_avx512vl(auVar576,auVar576);
          uVar427 = vcmpps_avx512vl(auVar672,auVar681,1);
          auVar676 = vmulps_avx512vl(auVar684,auVar684);
          auVar677 = vfmadd213ps_avx512vl(auVar1228,auVar676,auVar1290);
          auVar677 = vfmadd213ps_avx512vl(auVar677,auVar676,auVar1349);
          auVar680 = vfmadd213ps_avx512vl(auVar1459,auVar676,auVar1513);
          auVar680 = vfmadd213ps_avx512vl(auVar680,auVar676,auVar1567);
          auVar677 = vfmadd213ps_avx512vl(auVar677,auVar676,auVar1405);
          auVar680 = vfmadd213ps_avx512vl(auVar680,auVar676,auVar1621);
          auVar676 = vfmadd213ps_avx512vl(auVar680,auVar676,auVar1173);
          auVar684 = vfmadd231ps_avx512vl(auVar676,auVar684,auVar677);
          uVar428 = vcmpps_avx512vl(auVar672,auVar681,4);
          uVar428 = uVar426 & uVar428;
          auVar684 = vmulps_avx512vl(auVar684,auVar576);
          auVar676 = vaddps_avx512vl(auVar684,auVar1675);
          auVar577._0_4_ =
               (uint)(bVar28 & 1) * auVar676._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar684._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar577._4_4_ = (uint)bVar11 * auVar676._4_4_ | (uint)!bVar11 * auVar684._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar577._8_4_ = (uint)bVar11 * auVar676._8_4_ | (uint)!bVar11 * auVar684._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar577._12_4_ = (uint)bVar11 * auVar676._12_4_ | (uint)!bVar11 * auVar684._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar577._16_4_ = (uint)bVar11 * auVar676._16_4_ | (uint)!bVar11 * auVar684._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar577._20_4_ = (uint)bVar11 * auVar676._20_4_ | (uint)!bVar11 * auVar684._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar577._24_4_ = (uint)bVar11 * auVar676._24_4_ | (uint)!bVar11 * auVar684._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar577._28_4_ = (uint)bVar11 * auVar676._28_4_ | (uint)!bVar11 * auVar684._28_4_;
          auVar672 = vpternlogd_avx512vl(auVar672,auVar1728,auVar962,0xec);
          auVar675 = vpternlogd_avx512vl(auVar577,auVar675,auVar962,0xf8);
          uVar45 = vcmpps_avx512vl(auVar681,auVar672,2);
          bVar28 = ~((byte)uVar426 | (byte)uVar45);
          auVar672 = vaddps_avx512vl(auVar675,auVar574);
          bVar11 = (bool)((byte)uVar427 & 1);
          bVar14 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar427 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar427 >> 4) & 1);
          bVar22 = (bool)((byte)(uVar427 >> 5) & 1);
          bVar24 = (bool)((byte)(uVar427 >> 6) & 1);
          bVar26 = SUB81(uVar427 >> 7,0);
          auVar684 = vmovdqa32_avx512vl(auVar1728);
          iVar4 = (uint)(bVar28 & 1) * auVar684._0_4_;
          iVar421 = (uint)(bVar28 >> 1 & 1) * auVar684._4_4_;
          auVar578._4_4_ = iVar421;
          auVar578._0_4_ = iVar4;
          iVar423 = (uint)(bVar28 >> 2 & 1) * auVar684._8_4_;
          auVar578._8_4_ = iVar423;
          iVar1 = (uint)(bVar28 >> 3 & 1) * auVar684._12_4_;
          auVar578._12_4_ = iVar1;
          iVar2 = (uint)(bVar28 >> 4 & 1) * auVar684._16_4_;
          auVar578._16_4_ = iVar2;
          iVar3 = (uint)(bVar28 >> 5 & 1) * auVar684._20_4_;
          auVar578._20_4_ = iVar3;
          iVar6 = (uint)(bVar28 >> 6 & 1) * auVar684._24_4_;
          auVar578._24_4_ = iVar6;
          iVar5 = (uint)(bVar28 >> 7) * auVar684._28_4_;
          auVar578._28_4_ = iVar5;
          auVar671 = vpternlogd_avx512vl(auVar671,auVar578,auVar962,0xec);
          auVar671 = vpord_avx512vl(auVar671,auVar1779);
          bVar12 = (bool)((byte)uVar426 & 1);
          bVar15 = (bool)((byte)(uVar426 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar426 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar426 >> 3) & 1);
          bVar21 = (bool)((byte)(uVar426 >> 4) & 1);
          bVar23 = (bool)((byte)(uVar426 >> 5) & 1);
          bVar25 = (bool)((byte)(uVar426 >> 6) & 1);
          bVar27 = SUB81(uVar426 >> 7,0);
          bVar13 = (bool)((byte)uVar428 & 1);
          auVar579._0_4_ =
               (uint)bVar13 * ((uint)bVar11 * auVar672._0_4_ | (uint)!bVar11 * auVar675._0_4_) |
               (uint)!bVar13 * ((uint)bVar12 * auVar671._0_4_ | (uint)!bVar12 * iVar4);
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          auVar579._4_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar672._4_4_ | (uint)!bVar14 * auVar675._4_4_) |
               (uint)!bVar11 * ((uint)bVar15 * auVar671._4_4_ | (uint)!bVar15 * iVar421);
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          auVar579._8_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar672._8_4_ | (uint)!bVar16 * auVar675._8_4_) |
               (uint)!bVar11 * ((uint)bVar17 * auVar671._8_4_ | (uint)!bVar17 * iVar423);
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar579._12_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar672._12_4_ | (uint)!bVar18 * auVar675._12_4_) |
               (uint)!bVar11 * ((uint)bVar19 * auVar671._12_4_ | (uint)!bVar19 * iVar1);
          bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
          auVar579._16_4_ =
               (uint)bVar11 * ((uint)bVar20 * auVar672._16_4_ | (uint)!bVar20 * auVar675._16_4_) |
               (uint)!bVar11 * ((uint)bVar21 * auVar671._16_4_ | (uint)!bVar21 * iVar2);
          bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
          auVar579._20_4_ =
               (uint)bVar11 * ((uint)bVar22 * auVar672._20_4_ | (uint)!bVar22 * auVar675._20_4_) |
               (uint)!bVar11 * ((uint)bVar23 * auVar671._20_4_ | (uint)!bVar23 * iVar3);
          bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
          auVar579._24_4_ =
               (uint)bVar11 * ((uint)bVar24 * auVar672._24_4_ | (uint)!bVar24 * auVar675._24_4_) |
               (uint)!bVar11 * ((uint)bVar25 * auVar671._24_4_ | (uint)!bVar25 * iVar6);
          bVar11 = SUB81(uVar428 >> 7,0);
          auVar579._28_4_ =
               (uint)bVar11 * ((uint)bVar26 * auVar672._28_4_ | (uint)!bVar26 * auVar675._28_4_) |
               (uint)!bVar11 * ((uint)bVar27 * auVar671._28_4_ | (uint)!bVar27 * iVar5);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar579;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar422 = uVar872 + 8;
          iVar421 = uVar872 + 0xf;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if ((int)(uVar422 | 3) < (int)uVar424) {
        auVar462 = ZEXT816(0) << 0x40;
        auVar923._8_4_ = 0x80000000;
        auVar923._0_8_ = 0x8000000080000000;
        auVar923._12_4_ = 0x80000000;
        auVar1013._8_4_ = 0x40490fdb;
        auVar1013._0_8_ = 0x40490fdb40490fdb;
        auVar1013._12_4_ = 0x40490fdb;
        auVar1091._8_4_ = 0x7fffffff;
        auVar1091._0_8_ = 0x7fffffff7fffffff;
        auVar1091._12_4_ = 0x7fffffff;
        auVar1145._8_4_ = 0x3f800000;
        auVar1145._0_8_ = 0x3f8000003f800000;
        auVar1145._12_4_ = 0x3f800000;
        auVar1199._8_4_ = 0xbc83a25c;
        auVar1199._0_8_ = 0xbc83a25cbc83a25c;
        auVar1199._12_4_ = 0xbc83a25c;
        auVar1263._8_4_ = 0xbd99b01e;
        auVar1263._0_8_ = 0xbd99b01ebd99b01e;
        auVar1263._12_4_ = 0xbd99b01e;
        auVar1326._8_4_ = 0xbe117200;
        auVar1326._0_8_ = 0xbe117200be117200;
        auVar1326._12_4_ = 0xbe117200;
        auVar1382._8_4_ = 0xbeaaaa53;
        auVar1382._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1382._12_4_ = 0xbeaaaa53;
        auVar1436._8_4_ = 0x3b3ac537;
        auVar1436._0_8_ = 0x3b3ac5373b3ac537;
        auVar1436._12_4_ = 0x3b3ac537;
        auVar1490._8_4_ = 0x3d2edd4e;
        auVar1490._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1490._12_4_ = 0x3d2edd4e;
        auVar1544._8_4_ = 0x3dd9ed24;
        auVar1544._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1544._12_4_ = 0x3dd9ed24;
        auVar1598._8_4_ = 0x3e4cb974;
        auVar1598._0_8_ = 0x3e4cb9743e4cb974;
        auVar1598._12_4_ = 0x3e4cb974;
        auVar1652._8_4_ = 0x3fc90fdb;
        auVar1652._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1652._12_4_ = 0x3fc90fdb;
        auVar1706._8_4_ = 0x40490fdb;
        auVar1706._0_8_ = 0x40490fdb40490fdb;
        auVar1706._12_4_ = 0x40490fdb;
        auVar1759._8_4_ = 0x3fc90fdb;
        auVar1759._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1759._12_4_ = 0x3fc90fdb;
        uVar872 = uVar422;
        do {
          auVar492 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr;
          auVar493 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1;
          auVar516 = vdivps_avx512vl(auVar492,auVar493);
          uVar46 = vcmpps_avx512vl(auVar492,auVar462,1);
          auVar504 = vandps_avx512vl(auVar516,auVar1091);
          auVar59._8_4_ = 0xc0490fdb;
          auVar59._0_8_ = 0xc0490fdbc0490fdb;
          auVar59._12_4_ = 0xc0490fdb;
          auVar496 = vblendmps_avx512vl(auVar1013,auVar59);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar450._0_4_ = (uint)bVar11 * auVar496._0_4_ | (uint)!bVar11 * in_ZMM20._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar450._4_4_ = (uint)bVar11 * auVar496._4_4_ | (uint)!bVar11 * in_ZMM20._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar450._8_4_ = (uint)bVar11 * auVar496._8_4_ | (uint)!bVar11 * in_ZMM20._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar450._12_4_ = (uint)bVar11 * auVar496._12_4_ | (uint)!bVar11 * in_ZMM20._12_4_;
          in_ZMM20 = ZEXT1664(auVar450);
          uVar46 = vcmpps_avx512vl(auVar1145,auVar504,1);
          auVar60._8_4_ = 0xbf800000;
          auVar60._0_8_ = 0xbf800000bf800000;
          auVar60._12_4_ = 0xbf800000;
          auVar496 = vblendmps_avx512vl(auVar504,auVar60);
          bVar28 = (byte)uVar46;
          auVar451._0_4_ =
               (uint)(bVar28 & 1) * auVar496._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar451._4_4_ = (uint)bVar11 * auVar496._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar451._8_4_ = (uint)bVar11 * auVar496._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar451._12_4_ = (uint)bVar11 * auVar496._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          uVar426 = vcmpps_avx512vl(auVar492,auVar462,4);
          auVar504 = vdivps_avx512vl(auVar451,auVar504);
          auVar452._0_4_ =
               (uint)(bVar28 & 1) * auVar504._0_4_ | !(bool)(bVar28 & 1) * auVar451._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar452._4_4_ = (uint)bVar11 * auVar504._4_4_ | !bVar11 * auVar451._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar452._8_4_ = (uint)bVar11 * auVar504._8_4_ | !bVar11 * auVar451._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar452._12_4_ = (uint)bVar11 * auVar504._12_4_ | !bVar11 * auVar451._12_4_;
          in_ZMM21 = ZEXT1664(auVar452);
          auVar504 = vmulps_avx512vl(auVar452,auVar452);
          uVar427 = vcmpps_avx512vl(auVar493,auVar462,1);
          auVar496 = vmulps_avx512vl(auVar504,auVar504);
          auVar497 = vfmadd213ps_avx512vl(auVar1199,auVar496,auVar1263);
          auVar497 = vfmadd213ps_avx512vl(auVar497,auVar496,auVar1326);
          auVar498 = vfmadd213ps_avx512vl(auVar1436,auVar496,auVar1490);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar496,auVar1544);
          auVar497 = vfmadd213ps_avx512vl(auVar497,auVar496,auVar1382);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar496,auVar1598);
          auVar496 = vfmadd213ps_avx512vl(auVar498,auVar496,auVar1145);
          auVar504 = vfmadd231ps_avx512vl(auVar496,auVar504,auVar497);
          uVar428 = vcmpps_avx512vl(auVar493,auVar462,4);
          uVar428 = uVar426 & uVar428;
          auVar504 = vmulps_avx512vl(auVar504,auVar452);
          auVar496 = vaddps_avx512vl(auVar504,auVar1652);
          auVar453._0_4_ =
               (uint)(bVar28 & 1) * auVar496._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar504._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar453._4_4_ = (uint)bVar11 * auVar496._4_4_ | (uint)!bVar11 * auVar504._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar453._8_4_ = (uint)bVar11 * auVar496._8_4_ | (uint)!bVar11 * auVar504._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar453._12_4_ = (uint)bVar11 * auVar496._12_4_ | (uint)!bVar11 * auVar504._12_4_;
          auVar493 = vpternlogd_avx512vl(auVar493,auVar1706,auVar923,0xec);
          auVar516 = vpternlogd_avx512vl(auVar453,auVar516,auVar923,0xf8);
          uVar45 = vcmpps_avx512vl(auVar462,auVar493,2);
          uVar47 = ~((ushort)uVar426 | (ushort)uVar45);
          auVar493 = vaddps_avx512vl(auVar516,auVar450);
          bVar11 = (bool)((byte)uVar427 & 1);
          bVar14 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar504 = vmovdqa32_avx512vl(auVar1706);
          iVar421 = (uint)((byte)uVar47 & 1) * auVar504._0_4_;
          iVar423 = (uint)((byte)(uVar47 >> 1) & 1) * auVar504._4_4_;
          auVar454._4_4_ = iVar423;
          auVar454._0_4_ = iVar421;
          iVar1 = (uint)((byte)(uVar47 >> 2) & 1) * auVar504._8_4_;
          auVar454._8_4_ = iVar1;
          iVar2 = (uint)((byte)(uVar47 >> 3) & 1) * auVar504._12_4_;
          auVar454._12_4_ = iVar2;
          auVar492 = vpternlogd_avx512vl(auVar492,auVar454,auVar923,0xec);
          auVar492 = vpord_avx512vl(auVar492,auVar1759);
          bVar12 = (bool)((byte)uVar426 & 1);
          bVar15 = (bool)((byte)(uVar426 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar426 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar426 >> 3) & 1);
          bVar13 = (bool)((byte)uVar428 & 1);
          auVar455._0_4_ =
               (uint)bVar13 * ((uint)bVar11 * auVar493._0_4_ | (uint)!bVar11 * auVar516._0_4_) |
               (uint)!bVar13 * ((uint)bVar12 * auVar492._0_4_ | (uint)!bVar12 * iVar421);
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          auVar455._4_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar493._4_4_ | (uint)!bVar14 * auVar516._4_4_) |
               (uint)!bVar11 * ((uint)bVar15 * auVar492._4_4_ | (uint)!bVar15 * iVar423);
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          auVar455._8_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar493._8_4_ | (uint)!bVar16 * auVar516._8_4_) |
               (uint)!bVar11 * ((uint)bVar17 * auVar492._8_4_ | (uint)!bVar17 * iVar1);
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar455._12_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar493._12_4_ | (uint)!bVar18 * auVar516._12_4_) |
               (uint)!bVar11 * ((uint)bVar19 * auVar492._12_4_ | (uint)!bVar19 * iVar2);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar455;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar422 = uVar872 + 4;
          iVar421 = uVar872 + 7;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        return;
      }
      lVar425 = 0;
      do {
        auVar559._0_4_ =
             atan2f(*(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4),
                    *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4));
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar559._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_003a3d25;
      auVar559._0_4_ = *ptr;
      if (iVar421 == 4) {
        auVar462 = *(undefined1 (*) [16])ptr;
        auVar730 = ZEXT3264(CONCAT1616(auVar462,auVar462));
      }
      else {
        auVar462 = vpbroadcastd_avx512vl(ZEXT416((uint)auVar559._0_4_));
        if (iVar421 == 8) {
          auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          uVar880 = auVar462._0_4_;
          auVar1010._4_4_ = uVar880;
          auVar1010._0_4_ = uVar880;
          auVar1010._8_4_ = uVar880;
          auVar1010._12_4_ = uVar880;
          auVar1010._16_4_ = uVar880;
          auVar1010._20_4_ = uVar880;
          auVar1010._24_4_ = uVar880;
          auVar1010._28_4_ = uVar880;
          auVar730 = ZEXT3264(auVar1010);
          if (iVar421 == 0x10) {
            auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_003ad203;
          }
        }
      }
      auVar1010 = auVar730._0_32_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar1010,1);
LAB_003ad203:
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        auVar726 = ZEXT864(0);
        uVar46 = vcmpps_avx512f(auVar730,auVar726,1);
        auVar712 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar713 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
        bVar11 = (bool)((byte)uVar46 & 1);
        auVar869._0_4_ = (uint)bVar11 * auVar713._0_4_ | (uint)!bVar11 * auVar712._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        auVar869._4_4_ = (uint)bVar11 * auVar713._4_4_ | (uint)!bVar11 * auVar712._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        auVar869._8_4_ = (uint)bVar11 * auVar713._8_4_ | (uint)!bVar11 * auVar712._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar869._12_4_ = (uint)bVar11 * auVar713._12_4_ | (uint)!bVar11 * auVar712._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        auVar869._16_4_ = (uint)bVar11 * auVar713._16_4_ | (uint)!bVar11 * auVar712._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        auVar869._20_4_ = (uint)bVar11 * auVar713._20_4_ | (uint)!bVar11 * auVar712._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        auVar869._24_4_ = (uint)bVar11 * auVar713._24_4_ | (uint)!bVar11 * auVar712._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        auVar869._28_4_ = (uint)bVar11 * auVar713._28_4_ | (uint)!bVar11 * auVar712._28_4_;
        bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
        auVar869._32_4_ = (uint)bVar11 * auVar713._32_4_ | (uint)!bVar11 * auVar712._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        auVar869._36_4_ = (uint)bVar11 * auVar713._36_4_ | (uint)!bVar11 * auVar712._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        auVar869._40_4_ = (uint)bVar11 * auVar713._40_4_ | (uint)!bVar11 * auVar712._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        auVar869._44_4_ = (uint)bVar11 * auVar713._44_4_ | (uint)!bVar11 * auVar712._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        auVar869._48_4_ = (uint)bVar11 * auVar713._48_4_ | (uint)!bVar11 * auVar712._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        auVar869._52_4_ = (uint)bVar11 * auVar713._52_4_ | (uint)!bVar11 * auVar712._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        auVar869._56_4_ = (uint)bVar11 * auVar713._56_4_ | (uint)!bVar11 * auVar712._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        auVar869._60_4_ = (uint)bVar11 * auVar713._60_4_ | (uint)!bVar11 * auVar712._60_4_;
        auVar712 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        auVar343._8_4_ = 0x80000000;
        auVar343._0_8_ = 0x8000000080000000;
        auVar343._12_4_ = 0x80000000;
        auVar343._16_4_ = 0x80000000;
        auVar343._20_4_ = 0x80000000;
        auVar343._24_4_ = 0x80000000;
        auVar343._28_4_ = 0x80000000;
        auVar343._32_4_ = 0x80000000;
        auVar343._36_4_ = 0x80000000;
        auVar343._40_4_ = 0x80000000;
        auVar343._44_4_ = 0x80000000;
        auVar343._48_4_ = 0x80000000;
        auVar343._52_4_ = 0x80000000;
        auVar343._56_4_ = 0x80000000;
        auVar343._60_4_ = 0x80000000;
        auVar712 = vpternlogd_avx512f(auVar712,auVar730,auVar343,0xf8);
        iVar421 = 0xf;
        auVar713 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        uVar46 = vcmpps_avx512f(auVar730,auVar726,4);
        auVar725 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        do {
          auVar1755 = *(undefined1 (*) [64])ptr1;
          auVar732 = vdivps_avx512f(auVar730,auVar1755);
          auVar845 = vandps_avx512dq(auVar732,auVar714);
          uVar426 = vcmpps_avx512f(auVar715,auVar845,1);
          auVar344._8_4_ = 0xbf800000;
          auVar344._0_8_ = 0xbf800000bf800000;
          auVar344._12_4_ = 0xbf800000;
          auVar344._16_4_ = 0xbf800000;
          auVar344._20_4_ = 0xbf800000;
          auVar344._24_4_ = 0xbf800000;
          auVar344._28_4_ = 0xbf800000;
          auVar344._32_4_ = 0xbf800000;
          auVar344._36_4_ = 0xbf800000;
          auVar344._40_4_ = 0xbf800000;
          auVar344._44_4_ = 0xbf800000;
          auVar344._48_4_ = 0xbf800000;
          auVar344._52_4_ = 0xbf800000;
          auVar344._56_4_ = 0xbf800000;
          auVar344._60_4_ = 0xbf800000;
          auVar729 = vblendmps_avx512f(auVar845,auVar344);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar870._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * in_ZMM22._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar870._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar870._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar870._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar870._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar870._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar870._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar870._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
          bVar28 = (byte)(uVar426 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar870._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * in_ZMM22._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar870._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * in_ZMM22._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar870._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * in_ZMM22._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar870._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * in_ZMM22._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar870._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * in_ZMM22._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar870._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * in_ZMM22._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar870._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * in_ZMM22._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar870._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * in_ZMM22._60_4_;
          auVar845 = vmaxps_avx512f(auVar845,auVar715);
          auVar845 = vdivps_avx512f(auVar870,auVar845);
          in_ZMM22 = vmulps_avx512f(auVar845,auVar845);
          uVar427 = vcmpps_avx512f(auVar1755,auVar726,4);
          auVar729 = vmulps_avx512f(in_ZMM22,in_ZMM22);
          auVar727 = vfmadd213ps_avx512f(auVar716,auVar729,auVar717);
          auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar718);
          auVar728 = vfmadd213ps_avx512f(auVar720,auVar729,auVar721);
          auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar722);
          auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar719);
          auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar723);
          auVar729 = vfmadd213ps_avx512f(auVar728,auVar729,auVar715);
          auVar729 = vfmadd231ps_avx512f(auVar729,in_ZMM22,auVar727);
          uVar428 = vcmpps_avx512f(auVar1755,auVar726,1);
          auVar845 = vmulps_avx512f(auVar729,auVar845);
          auVar729 = vaddps_avx512f(auVar845,auVar724);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar871._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar871._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar845._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar871._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar845._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar871._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar845._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar871._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar845._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar871._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar845._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar871._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar845._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar871._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar845._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar871._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar845._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar871._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar845._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar871._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar845._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar871._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar845._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar871._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar845._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar871._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar845._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar871._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar845._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar871._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar845._60_4_;
          auVar1755 = vpternlogd_avx512f(auVar1755,auVar713,auVar725,0xea);
          auVar845 = vpternlogd_avx512f(auVar871,auVar732,auVar713,0xf8);
          uVar426 = vcmpps_avx512f(auVar1755,auVar726,1);
          auVar1755 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar729 = vaddps_avx512f(auVar845,auVar869);
          bVar11 = (bool)((byte)uVar428 & 1);
          in_ZMM21._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_;
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          in_ZMM21._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar845._4_4_;
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          in_ZMM21._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar845._8_4_;
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          in_ZMM21._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar845._12_4_;
          bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
          in_ZMM21._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar845._16_4_;
          bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
          in_ZMM21._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar845._20_4_;
          bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
          in_ZMM21._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar845._24_4_;
          bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
          in_ZMM21._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar845._28_4_;
          bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
          in_ZMM21._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar845._32_4_;
          bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
          in_ZMM21._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar845._36_4_;
          bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
          in_ZMM21._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar845._40_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
          in_ZMM21._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar845._44_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
          in_ZMM21._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar845._48_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
          in_ZMM21._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar845._52_4_;
          bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
          in_ZMM21._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar845._56_4_;
          bVar11 = SUB81(uVar428 >> 0xf,0);
          in_ZMM21._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar845._60_4_;
          auVar845 = vblendmps_avx512f(auVar712,in_ZMM21);
          bVar11 = (bool)((byte)uVar427 & 1);
          bVar13 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar427 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar427 >> 4) & 1);
          bVar21 = (bool)((byte)(uVar427 >> 5) & 1);
          bVar23 = (bool)((byte)(uVar427 >> 6) & 1);
          bVar25 = (bool)((byte)(uVar427 >> 7) & 1);
          bVar27 = (bool)((byte)(uVar427 >> 8) & 1);
          bVar30 = (bool)((byte)(uVar427 >> 9) & 1);
          bVar32 = (bool)((byte)(uVar427 >> 10) & 1);
          bVar34 = (bool)((byte)(uVar427 >> 0xb) & 1);
          bVar36 = (bool)((byte)(uVar427 >> 0xc) & 1);
          bVar38 = (bool)((byte)(uVar427 >> 0xd) & 1);
          bVar40 = (bool)((byte)(uVar427 >> 0xe) & 1);
          bVar42 = SUB81(uVar427 >> 0xf,0);
          bVar12 = (bool)((byte)uVar46 & 1);
          bVar14 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar22 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar24 = (bool)((byte)(uVar46 >> 6) & 1);
          bVar26 = (bool)((byte)(uVar46 >> 7) & 1);
          bVar29 = (bool)((byte)(uVar46 >> 8) & 1);
          bVar31 = (bool)((byte)(uVar46 >> 9) & 1);
          bVar33 = (bool)((byte)(uVar46 >> 10) & 1);
          bVar35 = (bool)((byte)(uVar46 >> 0xb) & 1);
          bVar37 = (bool)((byte)(uVar46 >> 0xc) & 1);
          bVar39 = (bool)((byte)(uVar46 >> 0xd) & 1);
          bVar41 = (bool)((byte)(uVar46 >> 0xe) & 1);
          bVar43 = SUB81(uVar46 >> 0xf,0);
          *outptr = (float)((uint)bVar12 *
                            ((uint)bVar11 * auVar845._0_4_ | (uint)!bVar11 * auVar732._0_4_) |
                           (uint)!bVar12 * (uint)((byte)uVar426 & 1) * auVar1755._0_4_);
          outptr[1] = (float)((uint)bVar14 *
                              ((uint)bVar13 * auVar845._4_4_ | (uint)!bVar13 * auVar732._4_4_) |
                             (uint)!bVar14 * (uint)((byte)(uVar426 >> 1) & 1) * auVar1755._4_4_);
          outptr[2] = (float)((uint)bVar16 *
                              ((uint)bVar15 * auVar845._8_4_ | (uint)!bVar15 * auVar732._8_4_) |
                             (uint)!bVar16 * (uint)((byte)(uVar426 >> 2) & 1) * auVar1755._8_4_);
          outptr[3] = (float)((uint)bVar18 *
                              ((uint)bVar17 * auVar845._12_4_ | (uint)!bVar17 * auVar732._12_4_) |
                             (uint)!bVar18 * (uint)((byte)(uVar426 >> 3) & 1) * auVar1755._12_4_);
          outptr[4] = (float)((uint)bVar20 *
                              ((uint)bVar19 * auVar845._16_4_ | (uint)!bVar19 * auVar732._16_4_) |
                             (uint)!bVar20 * (uint)((byte)(uVar426 >> 4) & 1) * auVar1755._16_4_);
          outptr[5] = (float)((uint)bVar22 *
                              ((uint)bVar21 * auVar845._20_4_ | (uint)!bVar21 * auVar732._20_4_) |
                             (uint)!bVar22 * (uint)((byte)(uVar426 >> 5) & 1) * auVar1755._20_4_);
          outptr[6] = (float)((uint)bVar24 *
                              ((uint)bVar23 * auVar845._24_4_ | (uint)!bVar23 * auVar732._24_4_) |
                             (uint)!bVar24 * (uint)((byte)(uVar426 >> 6) & 1) * auVar1755._24_4_);
          outptr[7] = (float)((uint)bVar26 *
                              ((uint)bVar25 * auVar845._28_4_ | (uint)!bVar25 * auVar732._28_4_) |
                             (uint)!bVar26 * (uint)((byte)(uVar426 >> 7) & 1) * auVar1755._28_4_);
          outptr[8] = (float)((uint)bVar29 *
                              ((uint)bVar27 * auVar845._32_4_ | (uint)!bVar27 * auVar732._32_4_) |
                             (uint)!bVar29 * (uint)((byte)(uVar426 >> 8) & 1) * auVar1755._32_4_);
          outptr[9] = (float)((uint)bVar31 *
                              ((uint)bVar30 * auVar845._36_4_ | (uint)!bVar30 * auVar732._36_4_) |
                             (uint)!bVar31 * (uint)((byte)(uVar426 >> 9) & 1) * auVar1755._36_4_);
          outptr[10] = (float)((uint)bVar33 *
                               ((uint)bVar32 * auVar845._40_4_ | (uint)!bVar32 * auVar732._40_4_) |
                              (uint)!bVar33 * (uint)((byte)(uVar426 >> 10) & 1) * auVar1755._40_4_);
          outptr[0xb] = (float)((uint)bVar35 *
                                ((uint)bVar34 * auVar845._44_4_ | (uint)!bVar34 * auVar732._44_4_) |
                               (uint)!bVar35 * (uint)((byte)(uVar426 >> 0xb) & 1) * auVar1755._44_4_
                               );
          outptr[0xc] = (float)((uint)bVar37 *
                                ((uint)bVar36 * auVar845._48_4_ | (uint)!bVar36 * auVar732._48_4_) |
                               (uint)!bVar37 * (uint)((byte)(uVar426 >> 0xc) & 1) * auVar1755._48_4_
                               );
          outptr[0xd] = (float)((uint)bVar39 *
                                ((uint)bVar38 * auVar845._52_4_ | (uint)!bVar38 * auVar732._52_4_) |
                               (uint)!bVar39 * (uint)((byte)(uVar426 >> 0xd) & 1) * auVar1755._52_4_
                               );
          outptr[0xe] = (float)((uint)bVar41 *
                                ((uint)bVar40 * auVar845._56_4_ | (uint)!bVar40 * auVar732._56_4_) |
                               (uint)!bVar41 * (uint)((byte)(uVar426 >> 0xe) & 1) * auVar1755._56_4_
                               );
          outptr[0xf] = (float)((uint)bVar43 *
                                ((uint)bVar42 * auVar845._60_4_ | (uint)!bVar42 * auVar732._60_4_) |
                               (uint)!bVar43 * (uint)(byte)(uVar426 >> 0xf) * auVar1755._60_4_);
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = outptr + 0x10;
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      if ((int)(uVar422 | 7) < (int)uVar424) {
        auVar492 = ZEXT816(0) << 0x40;
        auVar187._8_4_ = 0x80000000;
        auVar187._0_8_ = 0x8000000080000000;
        auVar187._12_4_ = 0x80000000;
        auVar187._16_4_ = 0x80000000;
        auVar187._20_4_ = 0x80000000;
        auVar187._24_4_ = 0x80000000;
        auVar187._28_4_ = 0x80000000;
        auVar671 = vpandd_avx512vl(auVar1010,auVar187);
        uVar46 = vcmpps_avx512vl(auVar1010,ZEXT1632(auVar492),4);
        uVar426 = vcmpps_avx512vl(auVar1010,ZEXT1632(auVar492),1);
        auVar672 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar707._0_4_ = (uint)bVar11 * auVar672._0_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar707._4_4_ = (uint)bVar11 * auVar672._4_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar707._8_4_ = (uint)bVar11 * auVar672._8_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar707._12_4_ = (uint)bVar11 * auVar672._12_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar707._16_4_ = (uint)bVar11 * auVar672._16_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar707._20_4_ = (uint)bVar11 * auVar672._20_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar707._24_4_ = (uint)bVar11 * auVar672._24_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = SUB81(uVar426 >> 7,0);
        auVar707._28_4_ = (uint)bVar11 * auVar672._28_4_ | (uint)!bVar11 * 0x40490fdb;
        auVar188._8_4_ = 0x3fc90fdb;
        auVar188._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar188._12_4_ = 0x3fc90fdb;
        auVar188._16_4_ = 0x3fc90fdb;
        auVar188._20_4_ = 0x3fc90fdb;
        auVar188._24_4_ = 0x3fc90fdb;
        auVar188._28_4_ = 0x3fc90fdb;
        auVar671 = vpord_avx512vl(auVar671,auVar188);
        auVar708._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar671._4_4_;
        auVar708._0_4_ = (uint)((byte)uVar46 & 1) * auVar671._0_4_;
        auVar708._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar671._8_4_;
        auVar708._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar671._12_4_;
        auVar708._16_4_ = (uint)((byte)(uVar46 >> 4) & 1) * auVar671._16_4_;
        auVar708._20_4_ = (uint)((byte)(uVar46 >> 5) & 1) * auVar671._20_4_;
        auVar708._24_4_ = (uint)((byte)(uVar46 >> 6) & 1) * auVar671._24_4_;
        auVar708._28_4_ = (uint)(byte)(uVar46 >> 7) * auVar671._28_4_;
        auVar1256._8_4_ = 0x80000000;
        auVar1256._0_8_ = 0x8000000080000000;
        auVar1256._12_4_ = 0x80000000;
        auVar1256._16_4_ = 0x80000000;
        auVar1256._20_4_ = 0x80000000;
        auVar1256._24_4_ = 0x80000000;
        auVar1256._28_4_ = 0x80000000;
        auVar1322._8_4_ = 0x7fffffff;
        auVar1322._0_8_ = 0x7fffffff7fffffff;
        auVar1322._12_4_ = 0x7fffffff;
        auVar1322._16_4_ = 0x7fffffff;
        auVar1322._20_4_ = 0x7fffffff;
        auVar1322._24_4_ = 0x7fffffff;
        auVar1322._28_4_ = 0x7fffffff;
        auVar1378._8_4_ = 0x3f800000;
        auVar1378._0_8_ = 0x3f8000003f800000;
        auVar1378._12_4_ = 0x3f800000;
        auVar1378._16_4_ = 0x3f800000;
        auVar1378._20_4_ = 0x3f800000;
        auVar1378._24_4_ = 0x3f800000;
        auVar1378._28_4_ = 0x3f800000;
        auVar1433._8_4_ = 0xbc83a25c;
        auVar1433._0_8_ = 0xbc83a25cbc83a25c;
        auVar1433._12_4_ = 0xbc83a25c;
        auVar1433._16_4_ = 0xbc83a25c;
        auVar1433._20_4_ = 0xbc83a25c;
        auVar1433._24_4_ = 0xbc83a25c;
        auVar1433._28_4_ = 0xbc83a25c;
        auVar1487._8_4_ = 0xbd99b01e;
        auVar1487._0_8_ = 0xbd99b01ebd99b01e;
        auVar1487._12_4_ = 0xbd99b01e;
        auVar1487._16_4_ = 0xbd99b01e;
        auVar1487._20_4_ = 0xbd99b01e;
        auVar1487._24_4_ = 0xbd99b01e;
        auVar1487._28_4_ = 0xbd99b01e;
        auVar1541._8_4_ = 0xbe117200;
        auVar1541._0_8_ = 0xbe117200be117200;
        auVar1541._12_4_ = 0xbe117200;
        auVar1541._16_4_ = 0xbe117200;
        auVar1541._20_4_ = 0xbe117200;
        auVar1541._24_4_ = 0xbe117200;
        auVar1541._28_4_ = 0xbe117200;
        auVar1595._8_4_ = 0xbeaaaa53;
        auVar1595._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1595._12_4_ = 0xbeaaaa53;
        auVar1595._16_4_ = 0xbeaaaa53;
        auVar1595._20_4_ = 0xbeaaaa53;
        auVar1595._24_4_ = 0xbeaaaa53;
        auVar1595._28_4_ = 0xbeaaaa53;
        auVar1649._8_4_ = 0x3b3ac537;
        auVar1649._0_8_ = 0x3b3ac5373b3ac537;
        auVar1649._12_4_ = 0x3b3ac537;
        auVar1649._16_4_ = 0x3b3ac537;
        auVar1649._20_4_ = 0x3b3ac537;
        auVar1649._24_4_ = 0x3b3ac537;
        auVar1649._28_4_ = 0x3b3ac537;
        auVar1703._8_4_ = 0x3d2edd4e;
        auVar1703._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1703._12_4_ = 0x3d2edd4e;
        auVar1703._16_4_ = 0x3d2edd4e;
        auVar1703._20_4_ = 0x3d2edd4e;
        auVar1703._24_4_ = 0x3d2edd4e;
        auVar1703._28_4_ = 0x3d2edd4e;
        auVar1754._8_4_ = 0x3dd9ed24;
        auVar1754._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1754._12_4_ = 0x3dd9ed24;
        auVar1754._16_4_ = 0x3dd9ed24;
        auVar1754._20_4_ = 0x3dd9ed24;
        auVar1754._24_4_ = 0x3dd9ed24;
        auVar1754._28_4_ = 0x3dd9ed24;
        auVar1802._8_4_ = 0x3e4cb974;
        auVar1802._0_8_ = 0x3e4cb9743e4cb974;
        auVar1802._12_4_ = 0x3e4cb974;
        auVar1802._16_4_ = 0x3e4cb974;
        auVar1802._20_4_ = 0x3e4cb974;
        auVar1802._24_4_ = 0x3e4cb974;
        auVar1802._28_4_ = 0x3e4cb974;
        auVar671 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        auVar672 = vpbroadcastd_avx512vl(ZEXT416(0x40490fdb));
        auVar675 = vpord_avx512vl(auVar708,auVar672);
        uVar872 = uVar422;
        do {
          auVar684 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1;
          auVar676 = vdivps_avx512vl(auVar1010,auVar684);
          vandps_avx512vl(auVar676,auVar1322);
          uVar426 = vcmpps_avx512vl(auVar1378,auVar676,1);
          auVar189._8_4_ = 0xbf800000;
          auVar189._0_8_ = 0xbf800000bf800000;
          auVar189._12_4_ = 0xbf800000;
          auVar189._16_4_ = 0xbf800000;
          auVar189._20_4_ = 0xbf800000;
          auVar189._24_4_ = 0xbf800000;
          auVar189._28_4_ = 0xbf800000;
          auVar677 = vblendmps_avx512vl(auVar676,auVar189);
          bVar28 = (byte)uVar426;
          auVar709._0_4_ =
               (uint)(bVar28 & 1) * auVar677._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar709._4_4_ = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar709._8_4_ = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar709._12_4_ = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar709._16_4_ = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar709._20_4_ = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar709._24_4_ = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar709._28_4_ = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
          auVar677 = vdivps_avx512vl(auVar709,auVar676);
          auVar710._0_4_ =
               (uint)(bVar28 & 1) * auVar677._0_4_ | !(bool)(bVar28 & 1) * auVar709._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar710._4_4_ = (uint)bVar11 * auVar677._4_4_ | !bVar11 * auVar709._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar710._8_4_ = (uint)bVar11 * auVar677._8_4_ | !bVar11 * auVar709._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar710._12_4_ = (uint)bVar11 * auVar677._12_4_ | !bVar11 * auVar709._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar710._16_4_ = (uint)bVar11 * auVar677._16_4_ | !bVar11 * auVar709._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar710._20_4_ = (uint)bVar11 * auVar677._20_4_ | !bVar11 * auVar709._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar710._24_4_ = (uint)bVar11 * auVar677._24_4_ | !bVar11 * auVar709._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar710._28_4_ = (uint)bVar11 * auVar677._28_4_ | !bVar11 * auVar709._28_4_;
          in_ZMM22 = ZEXT3264(auVar710);
          auVar677 = vmulps_avx512vl(auVar710,auVar710);
          auVar680 = vmulps_avx512vl(auVar677,auVar677);
          auVar562 = ZEXT1632(auVar492);
          uVar427 = vcmpps_avx512vl(auVar684,auVar562,4);
          uVar427 = uVar46 & uVar427;
          auVar681 = vfmadd213ps_avx512vl(auVar1433,auVar680,auVar1487);
          auVar681 = vfmadd213ps_avx512vl(auVar681,auVar680,auVar1541);
          auVar682 = vfmadd213ps_avx512vl(auVar1649,auVar680,auVar1703);
          auVar682 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1754);
          auVar682 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1802);
          auVar681 = vfmadd213ps_avx512vl(auVar681,auVar680,auVar1595);
          auVar680 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1378);
          auVar677 = vfmadd231ps_avx512vl(auVar680,auVar677,auVar681);
          auVar677 = vmulps_avx512vl(auVar677,auVar710);
          uVar428 = vcmpps_avx512vl(auVar684,auVar562,1);
          auVar680 = vaddps_avx512vl(auVar677,auVar671);
          auVar711._0_4_ =
               (uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar677._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar711._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * auVar677._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar711._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * auVar677._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar711._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * auVar677._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar711._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * auVar677._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar711._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * auVar677._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar711._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * auVar677._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar711._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * auVar677._28_4_;
          auVar676 = vpternlogd_avx512vl(auVar711,auVar676,auVar1256,0xf8);
          auVar684 = vpternlogd_avx512vl(auVar684,auVar672,auVar1256,0xec);
          auVar677 = vaddps_avx512vl(auVar676,auVar707);
          bVar11 = (bool)((byte)uVar428 & 1);
          uVar422 = (uint)bVar11 * auVar677._0_4_ | (uint)!bVar11 * auVar676._0_4_;
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          uVar873 = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * auVar676._4_4_;
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          uVar874 = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * auVar676._8_4_;
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          uVar875 = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * auVar676._12_4_;
          bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
          uVar876 = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * auVar676._16_4_;
          bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
          uVar877 = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * auVar676._20_4_;
          bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
          uVar878 = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * auVar676._24_4_;
          bVar11 = SUB81(uVar428 >> 7,0);
          uVar879 = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * auVar676._28_4_;
          in_ZMM21 = ZEXT3264(CONCAT428(uVar879,CONCAT424(uVar878,CONCAT420(uVar877,CONCAT416(
                                                  uVar876,CONCAT412(uVar875,CONCAT48(uVar874,
                                                  CONCAT44(uVar873,uVar422))))))));
          uVar45 = vcmpps_avx512vl(auVar562,auVar684,2);
          bVar28 = (byte)uVar46 | (byte)uVar45;
          auVar676 = vpblendmd_avx512vl(auVar675,auVar708);
          bVar12 = (bool)(bVar28 >> 1 & 1);
          bVar14 = (bool)(bVar28 >> 2 & 1);
          bVar16 = (bool)(bVar28 >> 3 & 1);
          bVar18 = (bool)(bVar28 >> 4 & 1);
          bVar20 = (bool)(bVar28 >> 5 & 1);
          bVar22 = (bool)(bVar28 >> 6 & 1);
          bVar11 = (bool)((byte)uVar427 & 1);
          bVar13 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar427 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar427 >> 4) & 1);
          bVar21 = (bool)((byte)(uVar427 >> 5) & 1);
          bVar23 = (bool)((byte)(uVar427 >> 6) & 1);
          bVar24 = SUB81(uVar427 >> 7,0);
          *outptr = (float)(bVar11 * uVar422 |
                           (uint)!bVar11 *
                           ((uint)(bVar28 & 1) * auVar676._0_4_ |
                           (uint)!(bool)(bVar28 & 1) * auVar684._0_4_));
          outptr[1] = (float)(bVar13 * uVar873 |
                             (uint)!bVar13 *
                             ((uint)bVar12 * auVar676._4_4_ | (uint)!bVar12 * auVar684._4_4_));
          outptr[2] = (float)(bVar15 * uVar874 |
                             (uint)!bVar15 *
                             ((uint)bVar14 * auVar676._8_4_ | (uint)!bVar14 * auVar684._8_4_));
          outptr[3] = (float)(bVar17 * uVar875 |
                             (uint)!bVar17 *
                             ((uint)bVar16 * auVar676._12_4_ | (uint)!bVar16 * auVar684._12_4_));
          outptr[4] = (float)(bVar19 * uVar876 |
                             (uint)!bVar19 *
                             ((uint)bVar18 * auVar676._16_4_ | (uint)!bVar18 * auVar684._16_4_));
          outptr[5] = (float)(bVar21 * uVar877 |
                             (uint)!bVar21 *
                             ((uint)bVar20 * auVar676._20_4_ | (uint)!bVar20 * auVar684._20_4_));
          outptr[6] = (float)(bVar23 * uVar878 |
                             (uint)!bVar23 *
                             ((uint)bVar22 * auVar676._24_4_ | (uint)!bVar22 * auVar684._24_4_));
          outptr[7] = (float)(bVar24 * uVar879 |
                             (uint)!bVar24 *
                             ((uint)(bVar28 >> 7) * auVar676._28_4_ |
                             (uint)!(bool)(bVar28 >> 7) * auVar684._28_4_));
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = outptr + 8;
          uVar422 = uVar872 + 8;
          iVar421 = uVar872 + 0xf;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if ((int)(uVar422 | 3) < (int)uVar424) {
        auVar516 = ZEXT816(0) << 0x40;
        auVar63._8_4_ = 0x80000000;
        auVar63._0_8_ = 0x8000000080000000;
        auVar63._12_4_ = 0x80000000;
        auVar492 = vpandd_avx512vl(auVar462,auVar63);
        uVar46 = vcmpps_avx512vl(auVar462,auVar516,4);
        uVar426 = vcmpps_avx512vl(auVar462,auVar516,1);
        auVar493 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar529._0_4_ = (uint)bVar11 * auVar493._0_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar529._4_4_ = (uint)bVar11 * auVar493._4_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar529._8_4_ = (uint)bVar11 * auVar493._8_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar529._12_4_ = (uint)bVar11 * auVar493._12_4_ | (uint)!bVar11 * 0x40490fdb;
        auVar64._8_4_ = 0x3fc90fdb;
        auVar64._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar64._12_4_ = 0x3fc90fdb;
        auVar492 = vpord_avx512vl(auVar492,auVar64);
        auVar530._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar492._4_4_;
        auVar530._0_4_ = (uint)((byte)uVar46 & 1) * auVar492._0_4_;
        auVar530._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar492._8_4_;
        auVar530._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar492._12_4_;
        auVar1165._8_4_ = 0x80000000;
        auVar1165._0_8_ = 0x8000000080000000;
        auVar1165._12_4_ = 0x80000000;
        auVar1217._8_4_ = 0x7fffffff;
        auVar1217._0_8_ = 0x7fffffff7fffffff;
        auVar1217._12_4_ = 0x7fffffff;
        auVar1283._8_4_ = 0x3f800000;
        auVar1283._0_8_ = 0x3f8000003f800000;
        auVar1283._12_4_ = 0x3f800000;
        auVar1342._8_4_ = 0xbc83a25c;
        auVar1342._0_8_ = 0xbc83a25cbc83a25c;
        auVar1342._12_4_ = 0xbc83a25c;
        auVar1398._8_4_ = 0xbd99b01e;
        auVar1398._0_8_ = 0xbd99b01ebd99b01e;
        auVar1398._12_4_ = 0xbd99b01e;
        auVar1452._8_4_ = 0xbe117200;
        auVar1452._0_8_ = 0xbe117200be117200;
        auVar1452._12_4_ = 0xbe117200;
        auVar1506._8_4_ = 0xbeaaaa53;
        auVar1506._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1506._12_4_ = 0xbeaaaa53;
        auVar1560._8_4_ = 0x3b3ac537;
        auVar1560._0_8_ = 0x3b3ac5373b3ac537;
        auVar1560._12_4_ = 0x3b3ac537;
        auVar1614._8_4_ = 0x3d2edd4e;
        auVar1614._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1614._12_4_ = 0x3d2edd4e;
        auVar1668._8_4_ = 0x3dd9ed24;
        auVar1668._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1668._12_4_ = 0x3dd9ed24;
        auVar1722._8_4_ = 0x3e4cb974;
        auVar1722._0_8_ = 0x3e4cb9743e4cb974;
        auVar1722._12_4_ = 0x3e4cb974;
        auVar1773._8_4_ = 0x3fc90fdb;
        auVar1773._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1773._12_4_ = 0x3fc90fdb;
        auVar492 = vpbroadcastd_avx512vl(ZEXT416(0x40490fdb));
        auVar493 = vpord_avx512vl(auVar530,auVar492);
        uVar872 = uVar422;
        do {
          auVar504 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1;
          auVar496 = vdivps_avx512vl(auVar462,auVar504);
          auVar497 = vandps_avx512vl(auVar496,auVar1217);
          uVar426 = vcmpps_avx512vl(auVar1283,auVar497,1);
          auVar65._8_4_ = 0xbf800000;
          auVar65._0_8_ = 0xbf800000bf800000;
          auVar65._12_4_ = 0xbf800000;
          auVar498 = vblendmps_avx512vl(auVar497,auVar65);
          bVar28 = (byte)uVar426;
          auVar531._0_4_ =
               (uint)(bVar28 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar531._4_4_ = (uint)bVar11 * auVar498._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar531._8_4_ = (uint)bVar11 * auVar498._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar531._12_4_ = (uint)bVar11 * auVar498._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          auVar497 = vdivps_avx512vl(auVar531,auVar497);
          auVar532._0_4_ =
               (uint)(bVar28 & 1) * auVar497._0_4_ | !(bool)(bVar28 & 1) * auVar531._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar532._4_4_ = (uint)bVar11 * auVar497._4_4_ | !bVar11 * auVar531._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar532._8_4_ = (uint)bVar11 * auVar497._8_4_ | !bVar11 * auVar531._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar532._12_4_ = (uint)bVar11 * auVar497._12_4_ | !bVar11 * auVar531._12_4_;
          in_ZMM21 = ZEXT1664(auVar532);
          auVar497 = vmulps_avx512vl(auVar532,auVar532);
          auVar498 = vmulps_avx512vl(auVar497,auVar497);
          uVar427 = vcmpps_avx512vl(auVar504,auVar516,4);
          uVar427 = uVar46 & uVar427;
          auVar501 = vfmadd213ps_avx512vl(auVar1342,auVar498,auVar1398);
          auVar501 = vfmadd213ps_avx512vl(auVar501,auVar498,auVar1452);
          auVar502 = vfmadd213ps_avx512vl(auVar1560,auVar498,auVar1614);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1668);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1722);
          auVar501 = vfmadd213ps_avx512vl(auVar501,auVar498,auVar1506);
          auVar498 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1283);
          auVar497 = vfmadd231ps_avx512vl(auVar498,auVar497,auVar501);
          auVar497 = vmulps_avx512vl(auVar497,auVar532);
          uVar428 = vcmpps_avx512vl(auVar504,auVar516,1);
          auVar498 = vaddps_avx512vl(auVar497,auVar1773);
          auVar533._0_4_ =
               (uint)(bVar28 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar497._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar533._4_4_ = (uint)bVar11 * auVar498._4_4_ | (uint)!bVar11 * auVar497._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar533._8_4_ = (uint)bVar11 * auVar498._8_4_ | (uint)!bVar11 * auVar497._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar533._12_4_ = (uint)bVar11 * auVar498._12_4_ | (uint)!bVar11 * auVar497._12_4_;
          auVar496 = vpternlogd_avx512vl(auVar533,auVar496,auVar1165,0xf8);
          auVar504 = vpternlogd_avx512vl(auVar504,auVar492,auVar1165,0xec);
          auVar497 = vaddps_avx512vl(auVar496,auVar529);
          bVar11 = (bool)((byte)uVar428 & 1);
          bVar14 = (bool)((byte)(uVar428 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar428 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar428 >> 3) & 1);
          uVar45 = vcmpps_avx512vl(auVar516,auVar504,2);
          uVar47 = (ushort)uVar46 | (ushort)uVar45;
          auVar498 = vpblendmd_avx512vl(auVar493,auVar530);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar13 = (bool)((byte)uVar427 & 1);
          bVar16 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar427 >> 3) & 1);
          *outptr = (float)((uint)bVar13 *
                            ((uint)bVar11 * auVar497._0_4_ | (uint)!bVar11 * auVar496._0_4_) |
                           (uint)!bVar13 *
                           ((uint)bVar12 * auVar498._0_4_ | (uint)!bVar12 * auVar504._0_4_));
          outptr[1] = (float)((uint)bVar16 *
                              ((uint)bVar14 * auVar497._4_4_ | (uint)!bVar14 * auVar496._4_4_) |
                             (uint)!bVar16 *
                             ((uint)bVar15 * auVar498._4_4_ | (uint)!bVar15 * auVar504._4_4_));
          outptr[2] = (float)((uint)bVar19 *
                              ((uint)bVar17 * auVar497._8_4_ | (uint)!bVar17 * auVar496._8_4_) |
                             (uint)!bVar19 *
                             ((uint)bVar18 * auVar498._8_4_ | (uint)!bVar18 * auVar504._8_4_));
          outptr[3] = (float)((uint)bVar22 *
                              ((uint)bVar20 * auVar497._12_4_ | (uint)!bVar20 * auVar496._12_4_) |
                             (uint)!bVar22 *
                             ((uint)bVar21 * auVar498._12_4_ | (uint)!bVar21 * auVar504._12_4_));
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = outptr + 4;
          uVar422 = uVar872 + 4;
          iVar421 = uVar872 + 7;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        return;
      }
      lVar425 = 0;
      do {
        auVar917._0_4_ = atan2f(auVar559._0_4_,*(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4))
        ;
        outptr[lVar425] = auVar917._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    auVar559._0_4_ = *ptr1;
    if (iVar421 == 4) {
      auVar462 = *(undefined1 (*) [16])ptr1;
      auVar730 = ZEXT3264(CONCAT1616(auVar462,auVar462));
    }
    else {
      auVar462 = vpbroadcastd_avx512vl(ZEXT416((uint)auVar559._0_4_));
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      }
      else {
        uVar880 = auVar462._0_4_;
        auVar1006._4_4_ = uVar880;
        auVar1006._0_4_ = uVar880;
        auVar1006._8_4_ = uVar880;
        auVar1006._12_4_ = uVar880;
        auVar1006._16_4_ = uVar880;
        auVar1006._20_4_ = uVar880;
        auVar1006._24_4_ = uVar880;
        auVar1006._28_4_ = uVar880;
        auVar730 = ZEXT3264(auVar1006);
        if (iVar421 == 0x10) {
          auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
          goto LAB_003ab2fd;
        }
      }
    }
    auVar1006 = auVar730._0_32_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar1006,1);
LAB_003ab2fd:
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      auVar712 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      auVar340._8_4_ = 0x80000000;
      auVar340._0_8_ = 0x8000000080000000;
      auVar340._12_4_ = 0x80000000;
      auVar340._16_4_ = 0x80000000;
      auVar340._20_4_ = 0x80000000;
      auVar340._24_4_ = 0x80000000;
      auVar340._28_4_ = 0x80000000;
      auVar340._32_4_ = 0x80000000;
      auVar340._36_4_ = 0x80000000;
      auVar340._40_4_ = 0x80000000;
      auVar340._44_4_ = 0x80000000;
      auVar340._48_4_ = 0x80000000;
      auVar340._52_4_ = 0x80000000;
      auVar340._56_4_ = 0x80000000;
      auVar340._60_4_ = 0x80000000;
      auVar712 = vpternlogd_avx512f(auVar712,auVar730,auVar340,0xf8);
      auVar1755 = ZEXT864(0);
      auVar713 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      uVar46 = vcmpps_avx512f(auVar712,auVar1755,1);
      auVar712 = vdivps_avx512f(auVar713,auVar730);
      auVar714 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar855._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar714._4_4_;
      auVar855._0_4_ = (uint)((byte)uVar46 & 1) * auVar714._0_4_;
      auVar855._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar714._8_4_;
      auVar855._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar714._12_4_;
      auVar855._16_4_ = (uint)((byte)(uVar46 >> 4) & 1) * auVar714._16_4_;
      auVar855._20_4_ = (uint)((byte)(uVar46 >> 5) & 1) * auVar714._20_4_;
      auVar855._24_4_ = (uint)((byte)(uVar46 >> 6) & 1) * auVar714._24_4_;
      auVar855._28_4_ = (uint)((byte)(uVar46 >> 7) & 1) * auVar714._28_4_;
      auVar855._32_4_ = (uint)((byte)(uVar46 >> 8) & 1) * auVar714._32_4_;
      auVar855._36_4_ = (uint)((byte)(uVar46 >> 9) & 1) * auVar714._36_4_;
      auVar855._40_4_ = (uint)((byte)(uVar46 >> 10) & 1) * auVar714._40_4_;
      auVar855._44_4_ = (uint)((byte)(uVar46 >> 0xb) & 1) * auVar714._44_4_;
      auVar855._48_4_ = (uint)((byte)(uVar46 >> 0xc) & 1) * auVar714._48_4_;
      auVar855._52_4_ = (uint)((byte)(uVar46 >> 0xd) & 1) * auVar714._52_4_;
      auVar855._56_4_ = (uint)((byte)(uVar46 >> 0xe) & 1) * auVar714._56_4_;
      auVar855._60_4_ = (uint)(byte)(uVar46 >> 0xf) * auVar714._60_4_;
      iVar421 = 0xf;
      uVar46 = vcmpps_avx512f(auVar730,auVar1755,1);
      auVar714 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar715 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar716 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar717 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar718 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar719 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar720 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar721 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar722 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar723 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar724 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar725 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      uVar426 = vcmpps_avx512f(auVar730,auVar1755,4);
      auVar726 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      auVar730 = in_ZMM22;
      do {
        auVar732 = *(undefined1 (*) [64])ptr;
        auVar845 = vmulps_avx512f(auVar732,auVar712);
        uVar427 = vcmpps_avx512f(auVar732,auVar1755,1);
        auVar729 = vandps_avx512dq(auVar845,auVar716);
        auVar341._8_4_ = 0xc0490fdb;
        auVar341._0_8_ = 0xc0490fdbc0490fdb;
        auVar341._12_4_ = 0xc0490fdb;
        auVar341._16_4_ = 0xc0490fdb;
        auVar341._20_4_ = 0xc0490fdb;
        auVar341._24_4_ = 0xc0490fdb;
        auVar341._28_4_ = 0xc0490fdb;
        auVar341._32_4_ = 0xc0490fdb;
        auVar341._36_4_ = 0xc0490fdb;
        auVar341._40_4_ = 0xc0490fdb;
        auVar341._44_4_ = 0xc0490fdb;
        auVar341._48_4_ = 0xc0490fdb;
        auVar341._52_4_ = 0xc0490fdb;
        auVar341._56_4_ = 0xc0490fdb;
        auVar341._60_4_ = 0xc0490fdb;
        auVar727 = vblendmps_avx512f(auVar715,auVar341);
        bVar11 = (bool)((byte)uVar427 & 1);
        in_ZMM22._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar730._0_4_;
        bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
        in_ZMM22._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar730._4_4_;
        bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
        in_ZMM22._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar730._8_4_;
        bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
        in_ZMM22._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar730._12_4_;
        bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
        in_ZMM22._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar730._16_4_;
        bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
        in_ZMM22._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar730._20_4_;
        bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
        in_ZMM22._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar730._24_4_;
        bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
        in_ZMM22._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar730._28_4_;
        bVar11 = (bool)((byte)(uVar427 >> 8) & 1);
        in_ZMM22._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar730._32_4_;
        bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
        in_ZMM22._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar730._36_4_;
        bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
        in_ZMM22._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar730._40_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
        in_ZMM22._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar730._44_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
        in_ZMM22._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar730._48_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
        in_ZMM22._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar730._52_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
        in_ZMM22._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar730._56_4_;
        bVar11 = SUB81(uVar427 >> 0xf,0);
        in_ZMM22._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar730._60_4_;
        uVar427 = vcmpps_avx512f(auVar713,auVar729,1);
        auVar342._8_4_ = 0xbf800000;
        auVar342._0_8_ = 0xbf800000bf800000;
        auVar342._12_4_ = 0xbf800000;
        auVar342._16_4_ = 0xbf800000;
        auVar342._20_4_ = 0xbf800000;
        auVar342._24_4_ = 0xbf800000;
        auVar342._28_4_ = 0xbf800000;
        auVar342._32_4_ = 0xbf800000;
        auVar342._36_4_ = 0xbf800000;
        auVar342._40_4_ = 0xbf800000;
        auVar342._44_4_ = 0xbf800000;
        auVar342._48_4_ = 0xbf800000;
        auVar342._52_4_ = 0xbf800000;
        auVar342._56_4_ = 0xbf800000;
        auVar342._60_4_ = 0xbf800000;
        auVar730 = vblendmps_avx512f(auVar729,auVar342);
        bVar11 = (bool)((byte)uVar427 & 1);
        auVar856._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * in_ZMM23._0_4_;
        bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
        auVar856._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * in_ZMM23._4_4_;
        bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
        auVar856._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * in_ZMM23._8_4_;
        bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
        auVar856._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * in_ZMM23._12_4_;
        bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
        auVar856._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * in_ZMM23._16_4_;
        bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
        auVar856._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * in_ZMM23._20_4_;
        bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
        auVar856._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * in_ZMM23._24_4_;
        bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
        auVar856._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * in_ZMM23._28_4_;
        bVar28 = (byte)(uVar427 >> 8);
        bVar11 = (bool)(bVar28 & 1);
        auVar856._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * in_ZMM23._32_4_;
        bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
        auVar856._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * in_ZMM23._36_4_;
        bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
        auVar856._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * in_ZMM23._40_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
        auVar856._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * in_ZMM23._44_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
        auVar856._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * in_ZMM23._48_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
        auVar856._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * in_ZMM23._52_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
        auVar856._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * in_ZMM23._56_4_;
        bVar11 = SUB81(uVar427 >> 0xf,0);
        auVar856._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * in_ZMM23._60_4_;
        auVar730 = vmaxps_avx512f(auVar729,auVar713);
        auVar730 = vdivps_avx512f(auVar856,auVar730);
        in_ZMM23 = vmulps_avx512f(auVar730,auVar730);
        auVar729 = vmulps_avx512f(in_ZMM23,in_ZMM23);
        auVar727 = vfmadd213ps_avx512f(auVar717,auVar729,auVar718);
        auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar719);
        auVar728 = vfmadd213ps_avx512f(auVar721,auVar729,auVar722);
        auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar723);
        auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar724);
        auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar720);
        auVar729 = vfmadd213ps_avx512f(auVar728,auVar729,auVar713);
        auVar729 = vfmadd231ps_avx512f(auVar729,in_ZMM23,auVar727);
        auVar730 = vmulps_avx512f(auVar729,auVar730);
        uVar428 = vcmpps_avx512f(auVar732,auVar1755,4);
        auVar729 = vaddps_avx512f(auVar730,auVar725);
        bVar11 = (bool)((byte)uVar427 & 1);
        auVar857._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
        bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
        auVar857._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
        bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
        auVar857._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
        bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
        auVar857._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
        bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
        auVar857._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
        bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
        auVar857._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
        bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
        auVar857._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
        bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
        auVar857._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
        bVar11 = (bool)(bVar28 & 1);
        auVar857._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
        bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
        auVar857._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
        bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
        auVar857._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
        auVar857._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
        auVar857._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
        auVar857._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
        bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
        auVar857._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
        bVar11 = SUB81(uVar427 >> 0xf,0);
        auVar857._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
        auVar730 = vpternlogd_avx512f(auVar857,auVar845,auVar714,0xf8);
        auVar845 = vaddps_avx512f(auVar730,in_ZMM22);
        bVar11 = (bool)((byte)uVar46 & 1);
        in_ZMM21._0_4_ = (uint)bVar11 * auVar845._0_4_ | (uint)!bVar11 * auVar730._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        in_ZMM21._4_4_ = (uint)bVar11 * auVar845._4_4_ | (uint)!bVar11 * auVar730._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        in_ZMM21._8_4_ = (uint)bVar11 * auVar845._8_4_ | (uint)!bVar11 * auVar730._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        in_ZMM21._12_4_ = (uint)bVar11 * auVar845._12_4_ | (uint)!bVar11 * auVar730._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        in_ZMM21._16_4_ = (uint)bVar11 * auVar845._16_4_ | (uint)!bVar11 * auVar730._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        in_ZMM21._20_4_ = (uint)bVar11 * auVar845._20_4_ | (uint)!bVar11 * auVar730._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        in_ZMM21._24_4_ = (uint)bVar11 * auVar845._24_4_ | (uint)!bVar11 * auVar730._24_4_;
        bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
        in_ZMM21._28_4_ = (uint)bVar11 * auVar845._28_4_ | (uint)!bVar11 * auVar730._28_4_;
        bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
        in_ZMM21._32_4_ = (uint)bVar11 * auVar845._32_4_ | (uint)!bVar11 * auVar730._32_4_;
        bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
        in_ZMM21._36_4_ = (uint)bVar11 * auVar845._36_4_ | (uint)!bVar11 * auVar730._36_4_;
        bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
        in_ZMM21._40_4_ = (uint)bVar11 * auVar845._40_4_ | (uint)!bVar11 * auVar730._40_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
        in_ZMM21._44_4_ = (uint)bVar11 * auVar845._44_4_ | (uint)!bVar11 * auVar730._44_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
        in_ZMM21._48_4_ = (uint)bVar11 * auVar845._48_4_ | (uint)!bVar11 * auVar730._48_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
        in_ZMM21._52_4_ = (uint)bVar11 * auVar845._52_4_ | (uint)!bVar11 * auVar730._52_4_;
        bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
        in_ZMM21._56_4_ = (uint)bVar11 * auVar845._56_4_ | (uint)!bVar11 * auVar730._56_4_;
        bVar11 = SUB81(uVar46 >> 0xf,0);
        in_ZMM21._60_4_ = (uint)bVar11 * auVar845._60_4_ | (uint)!bVar11 * auVar730._60_4_;
        auVar730 = vpternlogd_avx512f(auVar732,auVar714,auVar726,0xea);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar858._0_4_ = bVar11 * in_ZMM21._0_4_ | (uint)!bVar11 * auVar730._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar858._4_4_ = bVar11 * in_ZMM21._4_4_ | (uint)!bVar11 * auVar730._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar858._8_4_ = bVar11 * in_ZMM21._8_4_ | (uint)!bVar11 * auVar730._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar858._12_4_ = bVar11 * in_ZMM21._12_4_ | (uint)!bVar11 * auVar730._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar858._16_4_ = bVar11 * in_ZMM21._16_4_ | (uint)!bVar11 * auVar730._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar858._20_4_ = bVar11 * in_ZMM21._20_4_ | (uint)!bVar11 * auVar730._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar858._24_4_ = bVar11 * in_ZMM21._24_4_ | (uint)!bVar11 * auVar730._24_4_;
        bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
        auVar858._28_4_ = bVar11 * in_ZMM21._28_4_ | (uint)!bVar11 * auVar730._28_4_;
        bVar11 = (bool)((byte)(uVar426 >> 8) & 1);
        auVar858._32_4_ = bVar11 * in_ZMM21._32_4_ | (uint)!bVar11 * auVar730._32_4_;
        bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
        auVar858._36_4_ = bVar11 * in_ZMM21._36_4_ | (uint)!bVar11 * auVar730._36_4_;
        bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
        auVar858._40_4_ = bVar11 * in_ZMM21._40_4_ | (uint)!bVar11 * auVar730._40_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
        auVar858._44_4_ = bVar11 * in_ZMM21._44_4_ | (uint)!bVar11 * auVar730._44_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
        auVar858._48_4_ = bVar11 * in_ZMM21._48_4_ | (uint)!bVar11 * auVar730._48_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
        auVar858._52_4_ = bVar11 * in_ZMM21._52_4_ | (uint)!bVar11 * auVar730._52_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
        auVar858._56_4_ = bVar11 * in_ZMM21._56_4_ | (uint)!bVar11 * auVar730._56_4_;
        bVar11 = SUB81(uVar426 >> 0xf,0);
        auVar858._60_4_ = bVar11 * in_ZMM21._60_4_ | (uint)!bVar11 * auVar730._60_4_;
        auVar730 = vblendmps_avx512f(auVar855,auVar858);
        bVar11 = (bool)((byte)uVar428 & 1);
        bVar12 = (bool)((byte)(uVar428 >> 1) & 1);
        bVar13 = (bool)((byte)(uVar428 >> 2) & 1);
        bVar14 = (bool)((byte)(uVar428 >> 3) & 1);
        bVar15 = (bool)((byte)(uVar428 >> 4) & 1);
        bVar16 = (bool)((byte)(uVar428 >> 5) & 1);
        bVar17 = (bool)((byte)(uVar428 >> 6) & 1);
        bVar18 = (bool)((byte)(uVar428 >> 7) & 1);
        bVar19 = (bool)((byte)(uVar428 >> 8) & 1);
        bVar20 = (bool)((byte)(uVar428 >> 9) & 1);
        bVar21 = (bool)((byte)(uVar428 >> 10) & 1);
        bVar22 = (bool)((byte)(uVar428 >> 0xb) & 1);
        bVar23 = (bool)((byte)(uVar428 >> 0xc) & 1);
        bVar24 = (bool)((byte)(uVar428 >> 0xd) & 1);
        bVar25 = (bool)((byte)(uVar428 >> 0xe) & 1);
        bVar26 = SUB81(uVar428 >> 0xf,0);
        *outptr = (float)((uint)bVar11 * auVar730._0_4_ | !bVar11 * auVar858._0_4_);
        outptr[1] = (float)((uint)bVar12 * auVar730._4_4_ | !bVar12 * auVar858._4_4_);
        outptr[2] = (float)((uint)bVar13 * auVar730._8_4_ | !bVar13 * auVar858._8_4_);
        outptr[3] = (float)((uint)bVar14 * auVar730._12_4_ | !bVar14 * auVar858._12_4_);
        outptr[4] = (float)((uint)bVar15 * auVar730._16_4_ | !bVar15 * auVar858._16_4_);
        outptr[5] = (float)((uint)bVar16 * auVar730._20_4_ | !bVar16 * auVar858._20_4_);
        outptr[6] = (float)((uint)bVar17 * auVar730._24_4_ | !bVar17 * auVar858._24_4_);
        outptr[7] = (float)((uint)bVar18 * auVar730._28_4_ | !bVar18 * auVar858._28_4_);
        outptr[8] = (float)((uint)bVar19 * auVar730._32_4_ | !bVar19 * auVar858._32_4_);
        outptr[9] = (float)((uint)bVar20 * auVar730._36_4_ | !bVar20 * auVar858._36_4_);
        outptr[10] = (float)((uint)bVar21 * auVar730._40_4_ | !bVar21 * auVar858._40_4_);
        outptr[0xb] = (float)((uint)bVar22 * auVar730._44_4_ | !bVar22 * auVar858._44_4_);
        outptr[0xc] = (float)((uint)bVar23 * auVar730._48_4_ | !bVar23 * auVar858._48_4_);
        outptr[0xd] = (float)((uint)bVar24 * auVar730._52_4_ | !bVar24 * auVar858._52_4_);
        outptr[0xe] = (float)((uint)bVar25 * auVar730._56_4_ | !bVar25 * auVar858._56_4_);
        outptr[0xf] = (float)((uint)bVar26 * auVar730._60_4_ | !bVar26 * auVar858._60_4_);
        ptr = (float *)((long)ptr + 0x40);
        outptr = outptr + 0x10;
        iVar421 = iVar421 + 0x10;
        auVar730 = in_ZMM22;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
    }
    if ((int)(uVar422 | 7) < (int)uVar424) {
      auVar1074._8_4_ = 0x40490fdb;
      auVar1074._0_8_ = 0x40490fdb40490fdb;
      auVar1074._12_4_ = 0x40490fdb;
      auVar1074._16_4_ = 0x40490fdb;
      auVar1074._20_4_ = 0x40490fdb;
      auVar1074._24_4_ = 0x40490fdb;
      auVar1074._28_4_ = 0x40490fdb;
      auVar1316._8_4_ = 0x80000000;
      auVar1316._0_8_ = 0x8000000080000000;
      auVar1316._12_4_ = 0x80000000;
      auVar1316._16_4_ = 0x80000000;
      auVar1316._20_4_ = 0x80000000;
      auVar1316._24_4_ = 0x80000000;
      auVar1316._28_4_ = 0x80000000;
      auVar672 = vpternlogd_avx512vl(auVar1316,auVar1006,auVar1074,0xea);
      auVar1133._8_4_ = 0x3f800000;
      auVar1133._0_8_ = 0x3f8000003f800000;
      auVar1133._12_4_ = 0x3f800000;
      auVar1133._16_4_ = 0x3f800000;
      auVar1133._20_4_ = 0x3f800000;
      auVar1133._24_4_ = 0x3f800000;
      auVar1133._28_4_ = 0x3f800000;
      auVar671 = vdivps_avx(auVar1133,auVar1006);
      auVar492 = ZEXT816(0) << 0x40;
      uVar45 = vcmpps_avx512vl(ZEXT1632(auVar492),auVar672,2);
      uVar46 = vcmpps_avx512vl(auVar1006,ZEXT1632(auVar492),1);
      auVar1317._8_4_ = 0x80000000;
      auVar1317._0_8_ = 0x8000000080000000;
      auVar1317._12_4_ = 0x80000000;
      auVar1317._16_4_ = 0x80000000;
      auVar1317._20_4_ = 0x80000000;
      auVar1317._24_4_ = 0x80000000;
      auVar1317._28_4_ = 0x80000000;
      auVar1373._8_4_ = 0x40490fdb;
      auVar1373._0_8_ = 0x40490fdb40490fdb;
      auVar1373._12_4_ = 0x40490fdb;
      auVar1373._16_4_ = 0x40490fdb;
      auVar1373._20_4_ = 0x40490fdb;
      auVar1373._24_4_ = 0x40490fdb;
      auVar1373._28_4_ = 0x40490fdb;
      auVar1429._8_4_ = 0x7fffffff;
      auVar1429._0_8_ = 0x7fffffff7fffffff;
      auVar1429._12_4_ = 0x7fffffff;
      auVar1429._16_4_ = 0x7fffffff;
      auVar1429._20_4_ = 0x7fffffff;
      auVar1429._24_4_ = 0x7fffffff;
      auVar1429._28_4_ = 0x7fffffff;
      auVar1483._8_4_ = 0xbc83a25c;
      auVar1483._0_8_ = 0xbc83a25cbc83a25c;
      auVar1483._12_4_ = 0xbc83a25c;
      auVar1483._16_4_ = 0xbc83a25c;
      auVar1483._20_4_ = 0xbc83a25c;
      auVar1483._24_4_ = 0xbc83a25c;
      auVar1483._28_4_ = 0xbc83a25c;
      auVar1537._8_4_ = 0xbd99b01e;
      auVar1537._0_8_ = 0xbd99b01ebd99b01e;
      auVar1537._12_4_ = 0xbd99b01e;
      auVar1537._16_4_ = 0xbd99b01e;
      auVar1537._20_4_ = 0xbd99b01e;
      auVar1537._24_4_ = 0xbd99b01e;
      auVar1537._28_4_ = 0xbd99b01e;
      auVar1591._8_4_ = 0xbe117200;
      auVar1591._0_8_ = 0xbe117200be117200;
      auVar1591._12_4_ = 0xbe117200;
      auVar1591._16_4_ = 0xbe117200;
      auVar1591._20_4_ = 0xbe117200;
      auVar1591._24_4_ = 0xbe117200;
      auVar1591._28_4_ = 0xbe117200;
      auVar1645._8_4_ = 0xbeaaaa53;
      auVar1645._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1645._12_4_ = 0xbeaaaa53;
      auVar1645._16_4_ = 0xbeaaaa53;
      auVar1645._20_4_ = 0xbeaaaa53;
      auVar1645._24_4_ = 0xbeaaaa53;
      auVar1645._28_4_ = 0xbeaaaa53;
      auVar1699._8_4_ = 0x3b3ac537;
      auVar1699._0_8_ = 0x3b3ac5373b3ac537;
      auVar1699._12_4_ = 0x3b3ac537;
      auVar1699._16_4_ = 0x3b3ac537;
      auVar1699._20_4_ = 0x3b3ac537;
      auVar1699._24_4_ = 0x3b3ac537;
      auVar1699._28_4_ = 0x3b3ac537;
      auVar1750._8_4_ = 0x3d2edd4e;
      auVar1750._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1750._12_4_ = 0x3d2edd4e;
      auVar1750._16_4_ = 0x3d2edd4e;
      auVar1750._20_4_ = 0x3d2edd4e;
      auVar1750._24_4_ = 0x3d2edd4e;
      auVar1750._28_4_ = 0x3d2edd4e;
      auVar1799._8_4_ = 0x3dd9ed24;
      auVar1799._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1799._12_4_ = 0x3dd9ed24;
      auVar1799._16_4_ = 0x3dd9ed24;
      auVar1799._20_4_ = 0x3dd9ed24;
      auVar1799._24_4_ = 0x3dd9ed24;
      auVar1799._28_4_ = 0x3dd9ed24;
      auVar672 = vbroadcastss_avx512vl(ZEXT416(0x3e4cb974));
      auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      auVar684 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      uVar872 = uVar422;
      do {
        auVar676 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
        auVar677 = vmulps_avx512vl(auVar676,auVar671);
        auVar562 = ZEXT1632(auVar492);
        uVar426 = vcmpps_avx512vl(auVar676,auVar562,1);
        vandps_avx512vl(auVar677,auVar1429);
        auVar185._8_4_ = 0xc0490fdb;
        auVar185._0_8_ = 0xc0490fdbc0490fdb;
        auVar185._12_4_ = 0xc0490fdb;
        auVar185._16_4_ = 0xc0490fdb;
        auVar185._20_4_ = 0xc0490fdb;
        auVar185._24_4_ = 0xc0490fdb;
        auVar185._28_4_ = 0xc0490fdb;
        auVar680 = vblendmps_avx512vl(auVar1373,auVar185);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar691._0_4_ = (uint)bVar11 * auVar680._0_4_ | (uint)!bVar11 * in_ZMM22._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar691._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar691._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar691._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar691._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar691._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar691._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
        bVar11 = SUB81(uVar426 >> 7,0);
        auVar691._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
        in_ZMM22 = ZEXT3264(auVar691);
        uVar426 = vcmpps_avx512vl(auVar1133,auVar677,1);
        auVar186._8_4_ = 0xbf800000;
        auVar186._0_8_ = 0xbf800000bf800000;
        auVar186._12_4_ = 0xbf800000;
        auVar186._16_4_ = 0xbf800000;
        auVar186._20_4_ = 0xbf800000;
        auVar186._24_4_ = 0xbf800000;
        auVar186._28_4_ = 0xbf800000;
        auVar680 = vblendmps_avx512vl(auVar677,auVar186);
        bVar28 = (byte)uVar426;
        auVar692._0_4_ =
             (uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM23._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar692._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * in_ZMM23._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar692._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * in_ZMM23._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar692._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * in_ZMM23._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar692._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * in_ZMM23._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar692._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * in_ZMM23._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar692._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * in_ZMM23._24_4_;
        bVar11 = SUB81(uVar426 >> 7,0);
        auVar692._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * in_ZMM23._28_4_;
        auVar680 = vdivps_avx512vl(auVar692,auVar677);
        auVar693._0_4_ = (uint)(bVar28 & 1) * auVar680._0_4_ | !(bool)(bVar28 & 1) * auVar692._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar693._4_4_ = (uint)bVar11 * auVar680._4_4_ | !bVar11 * auVar692._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar693._8_4_ = (uint)bVar11 * auVar680._8_4_ | !bVar11 * auVar692._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar693._12_4_ = (uint)bVar11 * auVar680._12_4_ | !bVar11 * auVar692._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar693._16_4_ = (uint)bVar11 * auVar680._16_4_ | !bVar11 * auVar692._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar693._20_4_ = (uint)bVar11 * auVar680._20_4_ | !bVar11 * auVar692._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar693._24_4_ = (uint)bVar11 * auVar680._24_4_ | !bVar11 * auVar692._24_4_;
        bVar11 = SUB81(uVar426 >> 7,0);
        auVar693._28_4_ = (uint)bVar11 * auVar680._28_4_ | !bVar11 * auVar692._28_4_;
        in_ZMM23 = ZEXT3264(auVar693);
        uVar427 = vcmpps_avx512vl(auVar676,auVar562,4);
        auVar680 = vmulps_avx512vl(auVar693,auVar693);
        vandps_avx512vl(auVar676,auVar1317);
        auVar676 = vmulps_avx512vl(auVar680,auVar680);
        auVar681 = vfmadd213ps_avx512vl(auVar1483,auVar676,auVar1537);
        auVar681 = vfmadd213ps_avx512vl(auVar681,auVar676,auVar1591);
        auVar682 = vfmadd213ps_avx512vl(auVar1699,auVar676,auVar1750);
        auVar682 = vfmadd213ps_avx512vl(auVar682,auVar676,auVar1799);
        auVar681 = vfmadd213ps_avx512vl(auVar681,auVar676,auVar1645);
        auVar682 = vfmadd213ps_avx512vl(auVar682,auVar676,auVar672);
        auVar676 = vfmadd213ps_avx512vl(auVar682,auVar676,auVar1133);
        auVar676 = vfmadd231ps_avx512vl(auVar676,auVar680,auVar681);
        uVar428 = vcmpps_avx512vl(auVar1006,auVar562,4);
        uVar428 = uVar427 & uVar428;
        auVar676 = vmulps_avx512vl(auVar676,auVar693);
        auVar681 = vaddps_avx512vl(auVar676,auVar675);
        auVar694._0_4_ =
             (uint)(bVar28 & 1) * auVar681._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar676._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar694._4_4_ = (uint)bVar11 * auVar681._4_4_ | (uint)!bVar11 * auVar676._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar694._8_4_ = (uint)bVar11 * auVar681._8_4_ | (uint)!bVar11 * auVar676._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar694._12_4_ = (uint)bVar11 * auVar681._12_4_ | (uint)!bVar11 * auVar676._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar694._16_4_ = (uint)bVar11 * auVar681._16_4_ | (uint)!bVar11 * auVar676._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar694._20_4_ = (uint)bVar11 * auVar681._20_4_ | (uint)!bVar11 * auVar676._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar694._24_4_ = (uint)bVar11 * auVar681._24_4_ | (uint)!bVar11 * auVar676._24_4_;
        bVar11 = SUB81(uVar426 >> 7,0);
        auVar694._28_4_ = (uint)bVar11 * auVar681._28_4_ | (uint)!bVar11 * auVar676._28_4_;
        auVar676 = vpternlogd_avx512vl(auVar694,auVar677,auVar1317,0xf8);
        auVar677 = vaddps_avx512vl(auVar676,auVar691);
        bVar11 = (bool)((byte)uVar46 & 1);
        uVar422 = (uint)bVar11 * auVar677._0_4_ | (uint)!bVar11 * auVar676._0_4_;
        bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
        uVar873 = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * auVar676._4_4_;
        bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
        uVar874 = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * auVar676._8_4_;
        bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
        uVar875 = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * auVar676._12_4_;
        bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
        uVar876 = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * auVar676._16_4_;
        bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
        uVar877 = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * auVar676._20_4_;
        bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
        uVar878 = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * auVar676._24_4_;
        bVar11 = SUB81(uVar46 >> 7,0);
        uVar879 = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * auVar676._28_4_;
        in_ZMM21 = ZEXT3264(CONCAT428(uVar879,CONCAT424(uVar878,CONCAT420(uVar877,CONCAT416(uVar876,
                                                  CONCAT412(uVar875,CONCAT48(uVar874,CONCAT44(
                                                  uVar873,uVar422))))))));
        auVar676 = vorps_avx512vl(auVar680,auVar684);
        auVar695._4_4_ = (uint)((byte)(uVar427 >> 1) & 1) * auVar676._4_4_;
        auVar695._0_4_ = (uint)((byte)uVar427 & 1) * auVar676._0_4_;
        auVar695._8_4_ = (uint)((byte)(uVar427 >> 2) & 1) * auVar676._8_4_;
        auVar695._12_4_ = (uint)((byte)(uVar427 >> 3) & 1) * auVar676._12_4_;
        auVar695._16_4_ = (uint)((byte)(uVar427 >> 4) & 1) * auVar676._16_4_;
        auVar695._20_4_ = (uint)((byte)(uVar427 >> 5) & 1) * auVar676._20_4_;
        auVar695._24_4_ = (uint)((byte)(uVar427 >> 6) & 1) * auVar676._24_4_;
        auVar695._28_4_ = (uint)(byte)(uVar427 >> 7) * auVar676._28_4_;
        bVar28 = (byte)uVar427 | (byte)uVar45;
        auVar676 = vorps_avx512vl(auVar695,auVar1074);
        auVar677 = vmovdqa32_avx512vl(auVar695);
        bVar12 = (bool)(bVar28 >> 1 & 1);
        bVar14 = (bool)(bVar28 >> 2 & 1);
        bVar16 = (bool)(bVar28 >> 3 & 1);
        bVar18 = (bool)(bVar28 >> 4 & 1);
        bVar20 = (bool)(bVar28 >> 5 & 1);
        bVar22 = (bool)(bVar28 >> 6 & 1);
        bVar11 = (bool)((byte)uVar428 & 1);
        bVar13 = (bool)((byte)(uVar428 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar428 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar428 >> 3) & 1);
        bVar19 = (bool)((byte)(uVar428 >> 4) & 1);
        bVar21 = (bool)((byte)(uVar428 >> 5) & 1);
        bVar23 = (bool)((byte)(uVar428 >> 6) & 1);
        bVar24 = SUB81(uVar428 >> 7,0);
        *outptr = (float)(bVar11 * uVar422 |
                         (uint)!bVar11 *
                         ((uint)(bVar28 & 1) * auVar677._0_4_ |
                         (uint)!(bool)(bVar28 & 1) * auVar676._0_4_));
        outptr[1] = (float)(bVar13 * uVar873 |
                           (uint)!bVar13 *
                           ((uint)bVar12 * auVar677._4_4_ | (uint)!bVar12 * auVar676._4_4_));
        outptr[2] = (float)(bVar15 * uVar874 |
                           (uint)!bVar15 *
                           ((uint)bVar14 * auVar677._8_4_ | (uint)!bVar14 * auVar676._8_4_));
        outptr[3] = (float)(bVar17 * uVar875 |
                           (uint)!bVar17 *
                           ((uint)bVar16 * auVar677._12_4_ | (uint)!bVar16 * auVar676._12_4_));
        outptr[4] = (float)(bVar19 * uVar876 |
                           (uint)!bVar19 *
                           ((uint)bVar18 * auVar677._16_4_ | (uint)!bVar18 * auVar676._16_4_));
        outptr[5] = (float)(bVar21 * uVar877 |
                           (uint)!bVar21 *
                           ((uint)bVar20 * auVar677._20_4_ | (uint)!bVar20 * auVar676._20_4_));
        outptr[6] = (float)(bVar23 * uVar878 |
                           (uint)!bVar23 *
                           ((uint)bVar22 * auVar677._24_4_ | (uint)!bVar22 * auVar676._24_4_));
        outptr[7] = (float)(bVar24 * uVar879 |
                           (uint)!bVar24 *
                           ((uint)(bVar28 >> 7) * auVar677._28_4_ |
                           (uint)!(bool)(bVar28 >> 7) * auVar676._28_4_));
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        outptr = outptr + 8;
        uVar422 = uVar872 + 8;
        iVar421 = uVar872 + 0xf;
        uVar872 = uVar422;
      } while (iVar421 < (int)uVar424);
    }
    if ((int)(uVar422 | 3) < (int)uVar424) {
      auVar949._8_4_ = 0x40490fdb;
      auVar949._0_8_ = 0x40490fdb40490fdb;
      auVar949._12_4_ = 0x40490fdb;
      auVar1211._8_4_ = 0x80000000;
      auVar1211._0_8_ = 0x8000000080000000;
      auVar1211._12_4_ = 0x80000000;
      auVar493 = vpternlogd_avx512vl(auVar1211,auVar462,auVar949,0xea);
      auVar1029._8_4_ = 0x3f800000;
      auVar1029._0_8_ = 0x3f8000003f800000;
      auVar1029._12_4_ = 0x3f800000;
      auVar492 = vdivps_avx(auVar1029,auVar462);
      auVar504 = ZEXT816(0) << 0x40;
      uVar45 = vcmpps_avx512vl(auVar504,auVar493,2);
      uVar46 = vcmpps_avx512vl(auVar462,auVar504,1);
      auVar1212._8_4_ = 0x80000000;
      auVar1212._0_8_ = 0x8000000080000000;
      auVar1212._12_4_ = 0x80000000;
      auVar1277._8_4_ = 0x40490fdb;
      auVar1277._0_8_ = 0x40490fdb40490fdb;
      auVar1277._12_4_ = 0x40490fdb;
      auVar1338._8_4_ = 0x7fffffff;
      auVar1338._0_8_ = 0x7fffffff7fffffff;
      auVar1338._12_4_ = 0x7fffffff;
      auVar1394._8_4_ = 0xbc83a25c;
      auVar1394._0_8_ = 0xbc83a25cbc83a25c;
      auVar1394._12_4_ = 0xbc83a25c;
      auVar1448._8_4_ = 0xbd99b01e;
      auVar1448._0_8_ = 0xbd99b01ebd99b01e;
      auVar1448._12_4_ = 0xbd99b01e;
      auVar1502._8_4_ = 0xbe117200;
      auVar1502._0_8_ = 0xbe117200be117200;
      auVar1502._12_4_ = 0xbe117200;
      auVar1556._8_4_ = 0xbeaaaa53;
      auVar1556._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1556._12_4_ = 0xbeaaaa53;
      auVar1610._8_4_ = 0x3b3ac537;
      auVar1610._0_8_ = 0x3b3ac5373b3ac537;
      auVar1610._12_4_ = 0x3b3ac537;
      auVar1664._8_4_ = 0x3d2edd4e;
      auVar1664._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1664._12_4_ = 0x3d2edd4e;
      auVar1718._8_4_ = 0x3dd9ed24;
      auVar1718._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1718._12_4_ = 0x3dd9ed24;
      auVar1770._8_4_ = 0x3e4cb974;
      auVar1770._0_8_ = 0x3e4cb9743e4cb974;
      auVar1770._12_4_ = 0x3e4cb974;
      auVar493 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      auVar516 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      uVar872 = uVar422;
      do {
        auVar496 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr;
        auVar497 = vmulps_avx512vl(auVar496,auVar492);
        uVar426 = vcmpps_avx512vl(auVar496,auVar504,1);
        auVar498 = vandps_avx512vl(auVar497,auVar1338);
        auVar61._8_4_ = 0xc0490fdb;
        auVar61._0_8_ = 0xc0490fdbc0490fdb;
        auVar61._12_4_ = 0xc0490fdb;
        auVar501 = vblendmps_avx512vl(auVar1277,auVar61);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar511._0_4_ = (uint)bVar11 * auVar501._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar511._4_4_ = (uint)bVar11 * auVar501._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar511._8_4_ = (uint)bVar11 * auVar501._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar511._12_4_ = (uint)bVar11 * auVar501._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
        in_ZMM21 = ZEXT1664(auVar511);
        uVar426 = vcmpps_avx512vl(auVar1029,auVar498,1);
        auVar62._8_4_ = 0xbf800000;
        auVar62._0_8_ = 0xbf800000bf800000;
        auVar62._12_4_ = 0xbf800000;
        auVar501 = vblendmps_avx512vl(auVar498,auVar62);
        bVar28 = (byte)uVar426;
        auVar512._0_4_ =
             (uint)(bVar28 & 1) * auVar501._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar512._4_4_ = (uint)bVar11 * auVar501._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar512._8_4_ = (uint)bVar11 * auVar501._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar512._12_4_ = (uint)bVar11 * auVar501._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
        uVar427 = vcmpps_avx512vl(auVar496,auVar504,4);
        auVar498 = vdivps_avx512vl(auVar512,auVar498);
        auVar513._0_4_ = (uint)(bVar28 & 1) * auVar498._0_4_ | !(bool)(bVar28 & 1) * auVar512._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar513._4_4_ = (uint)bVar11 * auVar498._4_4_ | !bVar11 * auVar512._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar513._8_4_ = (uint)bVar11 * auVar498._8_4_ | !bVar11 * auVar512._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar513._12_4_ = (uint)bVar11 * auVar498._12_4_ | !bVar11 * auVar512._12_4_;
        in_ZMM22 = ZEXT1664(auVar513);
        auVar498 = vmulps_avx512vl(auVar513,auVar513);
        auVar496 = vandps_avx512vl(auVar496,auVar1212);
        auVar501 = vmulps_avx512vl(auVar498,auVar498);
        auVar502 = vfmadd213ps_avx512vl(auVar1394,auVar501,auVar1448);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar501,auVar1502);
        auVar520 = vfmadd213ps_avx512vl(auVar1610,auVar501,auVar1664);
        auVar520 = vfmadd213ps_avx512vl(auVar520,auVar501,auVar1718);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar501,auVar1556);
        auVar520 = vfmadd213ps_avx512vl(auVar520,auVar501,auVar1770);
        auVar501 = vfmadd213ps_avx512vl(auVar520,auVar501,auVar1029);
        auVar498 = vfmadd231ps_avx512vl(auVar501,auVar498,auVar502);
        uVar428 = vcmpps_avx512vl(auVar462,auVar504,4);
        uVar428 = uVar427 & uVar428;
        auVar498 = vmulps_avx512vl(auVar498,auVar513);
        auVar501 = vaddps_avx512vl(auVar498,auVar493);
        auVar514._0_4_ =
             (uint)(bVar28 & 1) * auVar501._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar498._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar514._4_4_ = (uint)bVar11 * auVar501._4_4_ | (uint)!bVar11 * auVar498._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar514._8_4_ = (uint)bVar11 * auVar501._8_4_ | (uint)!bVar11 * auVar498._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar514._12_4_ = (uint)bVar11 * auVar501._12_4_ | (uint)!bVar11 * auVar498._12_4_;
        auVar497 = vpternlogd_avx512vl(auVar514,auVar497,auVar1212,0xf8);
        auVar498 = vaddps_avx512vl(auVar497,auVar511);
        bVar11 = (bool)((byte)uVar46 & 1);
        bVar14 = (bool)((byte)(uVar46 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar46 >> 3) & 1);
        auVar496 = vorps_avx512vl(auVar496,auVar516);
        auVar515._4_4_ = (uint)((byte)(uVar427 >> 1) & 1) * auVar496._4_4_;
        auVar515._0_4_ = (uint)((byte)uVar427 & 1) * auVar496._0_4_;
        auVar515._8_4_ = (uint)((byte)(uVar427 >> 2) & 1) * auVar496._8_4_;
        auVar515._12_4_ = (uint)((byte)(uVar427 >> 3) & 1) * auVar496._12_4_;
        uVar47 = (ushort)uVar427 | (ushort)uVar45;
        auVar496 = vorps_avx512vl(auVar515,auVar949);
        auVar501 = vmovdqa32_avx512vl(auVar515);
        bVar12 = (bool)((byte)uVar47 & 1);
        bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar47 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar47 >> 3) & 1);
        bVar13 = (bool)((byte)uVar428 & 1);
        bVar16 = (bool)((byte)(uVar428 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar428 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar428 >> 3) & 1);
        *outptr = (float)((uint)bVar13 *
                          ((uint)bVar11 * auVar498._0_4_ | (uint)!bVar11 * auVar497._0_4_) |
                         (uint)!bVar13 *
                         ((uint)bVar12 * auVar501._0_4_ | (uint)!bVar12 * auVar496._0_4_));
        outptr[1] = (float)((uint)bVar16 *
                            ((uint)bVar14 * auVar498._4_4_ | (uint)!bVar14 * auVar497._4_4_) |
                           (uint)!bVar16 *
                           ((uint)bVar15 * auVar501._4_4_ | (uint)!bVar15 * auVar496._4_4_));
        outptr[2] = (float)((uint)bVar19 *
                            ((uint)bVar17 * auVar498._8_4_ | (uint)!bVar17 * auVar497._8_4_) |
                           (uint)!bVar19 *
                           ((uint)bVar18 * auVar501._8_4_ | (uint)!bVar18 * auVar496._8_4_));
        outptr[3] = (float)((uint)bVar22 *
                            ((uint)bVar20 * auVar498._12_4_ | (uint)!bVar20 * auVar497._12_4_) |
                           (uint)!bVar22 *
                           ((uint)bVar21 * auVar501._12_4_ | (uint)!bVar21 * auVar496._12_4_));
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        outptr = outptr + 4;
        uVar422 = uVar872 + 4;
        iVar421 = uVar872 + 7;
        uVar872 = uVar422;
      } while (iVar421 < (int)uVar424);
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      return;
    }
    lVar425 = 0;
    do {
      auVar917._0_4_ = atan2f(*(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4),auVar559._0_4_);
      outptr[lVar425] = auVar917._0_4_;
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  case 0xb:
    uVar422 = bw;
    if (bw < aw) {
      uVar422 = aw;
    }
    iVar421 = bp;
    if (bp < ap) {
      iVar421 = ap;
    }
    uVar424 = iVar421 * uVar422;
    if (ap != bp) {
LAB_0039fb25:
      if (bp != 1) {
        return;
      }
      if (aw == bw) {
        if (0 < (int)uVar422 && iVar421 == 0x10) {
          auVar1755 = ZEXT864(0);
          auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar713 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar725 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar726 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar730 = in_ZMM20;
          uVar424 = uVar422;
          do {
            auVar845 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
            auVar732 = *(undefined1 (*) [64])ptr;
            in_ZMM18 = vdivps_avx512f(auVar845,auVar732);
            uVar46 = vcmpps_avx512f(auVar845,auVar1755,1);
            auVar729 = vandps_avx512dq(in_ZMM18,auVar714);
            auVar327._8_4_ = 0xc0490fdb;
            auVar327._0_8_ = 0xc0490fdbc0490fdb;
            auVar327._12_4_ = 0xc0490fdb;
            auVar327._16_4_ = 0xc0490fdb;
            auVar327._20_4_ = 0xc0490fdb;
            auVar327._24_4_ = 0xc0490fdb;
            auVar327._28_4_ = 0xc0490fdb;
            auVar327._32_4_ = 0xc0490fdb;
            auVar327._36_4_ = 0xc0490fdb;
            auVar327._40_4_ = 0xc0490fdb;
            auVar327._44_4_ = 0xc0490fdb;
            auVar327._48_4_ = 0xc0490fdb;
            auVar327._52_4_ = 0xc0490fdb;
            auVar327._56_4_ = 0xc0490fdb;
            auVar327._60_4_ = 0xc0490fdb;
            auVar727 = vblendmps_avx512f(auVar713,auVar327);
            bVar11 = (bool)((byte)uVar46 & 1);
            in_ZMM20._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar730._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            in_ZMM20._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar730._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            in_ZMM20._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar730._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            in_ZMM20._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar730._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            in_ZMM20._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar730._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            in_ZMM20._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar730._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            in_ZMM20._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar730._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            in_ZMM20._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar730._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            in_ZMM20._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar730._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            in_ZMM20._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar730._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            in_ZMM20._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar730._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            in_ZMM20._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar730._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            in_ZMM20._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar730._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            in_ZMM20._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar730._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            in_ZMM20._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar730._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            in_ZMM20._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar730._60_4_;
            uVar46 = vcmpps_avx512f(auVar715,auVar729,1);
            auVar328._8_4_ = 0xbf800000;
            auVar328._0_8_ = 0xbf800000bf800000;
            auVar328._12_4_ = 0xbf800000;
            auVar328._16_4_ = 0xbf800000;
            auVar328._20_4_ = 0xbf800000;
            auVar328._24_4_ = 0xbf800000;
            auVar328._28_4_ = 0xbf800000;
            auVar328._32_4_ = 0xbf800000;
            auVar328._36_4_ = 0xbf800000;
            auVar328._40_4_ = 0xbf800000;
            auVar328._44_4_ = 0xbf800000;
            auVar328._48_4_ = 0xbf800000;
            auVar328._52_4_ = 0xbf800000;
            auVar328._56_4_ = 0xbf800000;
            auVar328._60_4_ = 0xbf800000;
            auVar730 = vblendmps_avx512f(auVar729,auVar328);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar744._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar744._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar744._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar744._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar744._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar744._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar744._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar744._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
            bVar28 = (byte)(uVar46 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar744._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * in_ZMM21._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar744._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * in_ZMM21._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar744._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * in_ZMM21._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar744._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * in_ZMM21._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar744._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * in_ZMM21._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar744._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * in_ZMM21._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar744._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * in_ZMM21._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar744._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * in_ZMM21._60_4_;
            auVar730 = vmaxps_avx512f(auVar729,auVar715);
            uVar426 = vcmpps_avx512f(auVar732,auVar1755,4);
            auVar730 = vdivps_avx512f(auVar744,auVar730);
            uVar427 = vcmpps_avx512f(auVar732,auVar1755,1);
            in_ZMM21 = vmulps_avx512f(auVar730,auVar730);
            auVar729 = vmulps_avx512f(in_ZMM21,in_ZMM21);
            auVar727 = vfmadd213ps_avx512f(auVar716,auVar729,auVar717);
            auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar718);
            auVar728 = vfmadd213ps_avx512f(auVar720,auVar729,auVar721);
            auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar719);
            auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar722);
            auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar723);
            auVar729 = vfmadd213ps_avx512f(auVar728,auVar729,auVar715);
            uVar428 = vcmpps_avx512f(auVar845,auVar1755,4);
            auVar729 = vfmadd231ps_avx512f(auVar729,in_ZMM21,auVar727);
            auVar730 = vmulps_avx512f(auVar729,auVar730);
            auVar729 = vaddps_avx512f(auVar730,auVar724);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar745._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar745._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar745._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar745._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar745._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar745._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar745._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar745._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar745._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar745._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar745._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar745._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar745._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar745._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar745._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar745._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
            auVar730 = vpternlogd_avx512f(auVar745,in_ZMM18,auVar712,0xf8);
            auVar729 = vaddps_avx512f(auVar730,in_ZMM20);
            bVar11 = (bool)((byte)uVar427 & 1);
            in_ZMM19._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
            bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
            in_ZMM19._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
            bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
            in_ZMM19._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
            bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
            in_ZMM19._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
            bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
            in_ZMM19._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
            bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
            in_ZMM19._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
            bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
            in_ZMM19._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
            bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
            in_ZMM19._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
            bVar11 = (bool)((byte)(uVar427 >> 8) & 1);
            in_ZMM19._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
            bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
            in_ZMM19._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
            bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
            in_ZMM19._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
            in_ZMM19._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
            in_ZMM19._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
            in_ZMM19._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
            in_ZMM19._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
            bVar11 = SUB81(uVar427 >> 0xf,0);
            in_ZMM19._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
            auVar730 = vpternlogd_avx512f(auVar732,auVar712,auVar725,0xea);
            uVar46 = vcmpps_avx512f(auVar730,auVar1755,1);
            auVar730 = vpternlogd_avx512f(auVar845,auVar712,auVar726,0xea);
            bVar11 = (bool)((byte)uVar426 & 1);
            bVar13 = (bool)((byte)(uVar426 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar426 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar426 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar426 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar426 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar426 >> 6) & 1);
            bVar19 = (bool)((byte)(uVar426 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar426 >> 8) & 1);
            bVar21 = (bool)((byte)(uVar426 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar426 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar426 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar426 >> 0xc) & 1);
            bVar25 = (bool)((byte)(uVar426 >> 0xd) & 1);
            bVar26 = (bool)((byte)(uVar426 >> 0xe) & 1);
            bVar27 = SUB81(uVar426 >> 0xf,0);
            bVar12 = (bool)((byte)uVar428 & 1);
            auVar746._0_4_ =
                 (uint)bVar12 * (bVar11 * in_ZMM19._0_4_ | (uint)!bVar11 * auVar730._0_4_) |
                 (uint)!bVar12 * (uint)((byte)uVar46 & 1) * auVar713._0_4_;
            bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
            auVar746._4_4_ =
                 (uint)bVar11 * (bVar13 * in_ZMM19._4_4_ | (uint)!bVar13 * auVar730._4_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 1) & 1) * auVar713._4_4_;
            bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
            auVar746._8_4_ =
                 (uint)bVar11 * (bVar14 * in_ZMM19._8_4_ | (uint)!bVar14 * auVar730._8_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 2) & 1) * auVar713._8_4_;
            bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
            auVar746._12_4_ =
                 (uint)bVar11 * (bVar15 * in_ZMM19._12_4_ | (uint)!bVar15 * auVar730._12_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 3) & 1) * auVar713._12_4_;
            bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
            auVar746._16_4_ =
                 (uint)bVar11 * (bVar16 * in_ZMM19._16_4_ | (uint)!bVar16 * auVar730._16_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 4) & 1) * auVar713._16_4_;
            bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
            auVar746._20_4_ =
                 (uint)bVar11 * (bVar17 * in_ZMM19._20_4_ | (uint)!bVar17 * auVar730._20_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 5) & 1) * auVar713._20_4_;
            bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
            auVar746._24_4_ =
                 (uint)bVar11 * (bVar18 * in_ZMM19._24_4_ | (uint)!bVar18 * auVar730._24_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 6) & 1) * auVar713._24_4_;
            bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
            auVar746._28_4_ =
                 (uint)bVar11 * (bVar19 * in_ZMM19._28_4_ | (uint)!bVar19 * auVar730._28_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 7) & 1) * auVar713._28_4_;
            bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
            auVar746._32_4_ =
                 (uint)bVar11 * (bVar20 * in_ZMM19._32_4_ | (uint)!bVar20 * auVar730._32_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 8) & 1) * auVar713._32_4_;
            bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
            auVar746._36_4_ =
                 (uint)bVar11 * (bVar21 * in_ZMM19._36_4_ | (uint)!bVar21 * auVar730._36_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 9) & 1) * auVar713._36_4_;
            bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
            auVar746._40_4_ =
                 (uint)bVar11 * (bVar22 * in_ZMM19._40_4_ | (uint)!bVar22 * auVar730._40_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 10) & 1) * auVar713._40_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
            auVar746._44_4_ =
                 (uint)bVar11 * (bVar23 * in_ZMM19._44_4_ | (uint)!bVar23 * auVar730._44_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xb) & 1) * auVar713._44_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
            auVar746._48_4_ =
                 (uint)bVar11 * (bVar24 * in_ZMM19._48_4_ | (uint)!bVar24 * auVar730._48_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xc) & 1) * auVar713._48_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
            auVar746._52_4_ =
                 (uint)bVar11 * (bVar25 * in_ZMM19._52_4_ | (uint)!bVar25 * auVar730._52_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xd) & 1) * auVar713._52_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
            auVar746._56_4_ =
                 (uint)bVar11 * (bVar26 * in_ZMM19._56_4_ | (uint)!bVar26 * auVar730._56_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xe) & 1) * auVar713._56_4_;
            bVar11 = SUB81(uVar428 >> 0xf,0);
            auVar746._60_4_ =
                 (uint)bVar11 * (bVar27 * in_ZMM19._60_4_ | (uint)!bVar27 * auVar730._60_4_) |
                 (uint)!bVar11 * (uint)(byte)(uVar46 >> 0xf) * auVar713._60_4_;
            *(undefined1 (*) [64])outptr = auVar746;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x40);
            uVar424 = uVar424 - 1;
            auVar730 = in_ZMM20;
          } while (uVar424 != 0);
        }
        if (iVar421 == 8) {
          uVar424 = 0;
          if (1 < (int)uVar422) {
            iVar423 = 1;
            auVar1755 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
            auVar713 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
            auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
            auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
            auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
            auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
            auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
            auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
            auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
            auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
            auVar723 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
            auVar724 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
            auVar725 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
            auVar726 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
            auVar730 = in_ZMM20;
            do {
              auVar671 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar732 = *(undefined1 (*) [64])ptr;
              auVar672 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
              auVar845 = vinsertf64x4_avx512f(ZEXT3264(auVar671),auVar672,1);
              in_ZMM18 = vdivps_avx512f(auVar845,auVar732);
              uVar46 = vcmpps_avx512f(auVar845,auVar1755,1);
              auVar729 = vandps_avx512dq(in_ZMM18,auVar714);
              auVar329._8_4_ = 0xc0490fdb;
              auVar329._0_8_ = 0xc0490fdbc0490fdb;
              auVar329._12_4_ = 0xc0490fdb;
              auVar329._16_4_ = 0xc0490fdb;
              auVar329._20_4_ = 0xc0490fdb;
              auVar329._24_4_ = 0xc0490fdb;
              auVar329._28_4_ = 0xc0490fdb;
              auVar329._32_4_ = 0xc0490fdb;
              auVar329._36_4_ = 0xc0490fdb;
              auVar329._40_4_ = 0xc0490fdb;
              auVar329._44_4_ = 0xc0490fdb;
              auVar329._48_4_ = 0xc0490fdb;
              auVar329._52_4_ = 0xc0490fdb;
              auVar329._56_4_ = 0xc0490fdb;
              auVar329._60_4_ = 0xc0490fdb;
              auVar727 = vblendmps_avx512f(auVar713,auVar329);
              bVar11 = (bool)((byte)uVar46 & 1);
              in_ZMM20._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar730._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              in_ZMM20._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar730._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              in_ZMM20._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar730._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              in_ZMM20._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar730._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              in_ZMM20._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar730._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              in_ZMM20._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar730._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              in_ZMM20._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar730._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              in_ZMM20._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar730._28_4_;
              bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
              in_ZMM20._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar730._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              in_ZMM20._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar730._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              in_ZMM20._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar730._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              in_ZMM20._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar730._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              in_ZMM20._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar730._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              in_ZMM20._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar730._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              in_ZMM20._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar730._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              in_ZMM20._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar730._60_4_;
              uVar46 = vcmpps_avx512f(auVar715,auVar729,1);
              auVar330._8_4_ = 0xbf800000;
              auVar330._0_8_ = 0xbf800000bf800000;
              auVar330._12_4_ = 0xbf800000;
              auVar330._16_4_ = 0xbf800000;
              auVar330._20_4_ = 0xbf800000;
              auVar330._24_4_ = 0xbf800000;
              auVar330._28_4_ = 0xbf800000;
              auVar330._32_4_ = 0xbf800000;
              auVar330._36_4_ = 0xbf800000;
              auVar330._40_4_ = 0xbf800000;
              auVar330._44_4_ = 0xbf800000;
              auVar330._48_4_ = 0xbf800000;
              auVar330._52_4_ = 0xbf800000;
              auVar330._56_4_ = 0xbf800000;
              auVar330._60_4_ = 0xbf800000;
              auVar730 = vblendmps_avx512f(auVar729,auVar330);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar747._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar747._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar747._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar747._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar747._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar747._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar747._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              auVar747._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
              bVar28 = (byte)(uVar46 >> 8);
              bVar11 = (bool)(bVar28 & 1);
              auVar747._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * in_ZMM21._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              auVar747._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * in_ZMM21._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              auVar747._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * in_ZMM21._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              auVar747._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * in_ZMM21._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              auVar747._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * in_ZMM21._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              auVar747._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * in_ZMM21._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              auVar747._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * in_ZMM21._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              auVar747._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * in_ZMM21._60_4_;
              auVar730 = vmaxps_avx512f(auVar729,auVar715);
              auVar730 = vdivps_avx512f(auVar747,auVar730);
              uVar426 = vcmpps_avx512f(auVar732,auVar1755,4);
              in_ZMM21 = vmulps_avx512f(auVar730,auVar730);
              uVar427 = vcmpps_avx512f(auVar732,auVar1755,1);
              auVar729 = vmulps_avx512f(in_ZMM21,in_ZMM21);
              auVar727 = vfmadd213ps_avx512f(auVar716,auVar729,auVar717);
              auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar718);
              auVar728 = vfmadd213ps_avx512f(auVar720,auVar729,auVar721);
              auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar722);
              auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar719);
              auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar723);
              auVar729 = vfmadd213ps_avx512f(auVar728,auVar729,auVar715);
              auVar729 = vfmadd231ps_avx512f(auVar729,in_ZMM21,auVar727);
              uVar428 = vcmpps_avx512f(auVar845,auVar1755,4);
              auVar730 = vmulps_avx512f(auVar729,auVar730);
              auVar729 = vaddps_avx512f(auVar730,auVar724);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar748._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar748._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar748._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar748._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar748._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar748._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar748._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
              bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
              auVar748._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
              bVar11 = (bool)(bVar28 & 1);
              auVar748._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
              bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
              auVar748._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
              bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
              auVar748._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
              auVar748._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
              auVar748._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
              auVar748._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
              bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
              auVar748._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
              bVar11 = SUB81(uVar46 >> 0xf,0);
              auVar748._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
              auVar730 = vpternlogd_avx512f(auVar748,in_ZMM18,auVar712,0xf8);
              auVar729 = vaddps_avx512f(auVar730,in_ZMM20);
              bVar11 = (bool)((byte)uVar427 & 1);
              in_ZMM19._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
              bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
              in_ZMM19._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
              bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
              in_ZMM19._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
              bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
              in_ZMM19._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
              bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
              in_ZMM19._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
              bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
              in_ZMM19._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
              bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
              in_ZMM19._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
              bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
              in_ZMM19._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
              bVar11 = (bool)((byte)(uVar427 >> 8) & 1);
              in_ZMM19._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
              bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
              in_ZMM19._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
              bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
              in_ZMM19._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
              bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
              in_ZMM19._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
              bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
              in_ZMM19._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
              bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
              in_ZMM19._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
              bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
              in_ZMM19._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
              bVar11 = SUB81(uVar427 >> 0xf,0);
              in_ZMM19._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
              auVar730 = vpternlogd_avx512f(auVar732,auVar712,auVar725,0xea);
              uVar46 = vcmpps_avx512f(auVar730,auVar1755,1);
              auVar730 = vpternlogd_avx512f(auVar845,auVar712,auVar726,0xea);
              bVar11 = (bool)((byte)uVar426 & 1);
              bVar13 = (bool)((byte)(uVar426 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar426 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar426 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar426 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar426 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar426 >> 6) & 1);
              bVar19 = (bool)((byte)(uVar426 >> 7) & 1);
              bVar20 = (bool)((byte)(uVar426 >> 8) & 1);
              bVar21 = (bool)((byte)(uVar426 >> 9) & 1);
              bVar22 = (bool)((byte)(uVar426 >> 10) & 1);
              bVar23 = (bool)((byte)(uVar426 >> 0xb) & 1);
              bVar24 = (bool)((byte)(uVar426 >> 0xc) & 1);
              bVar25 = (bool)((byte)(uVar426 >> 0xd) & 1);
              bVar26 = (bool)((byte)(uVar426 >> 0xe) & 1);
              bVar27 = SUB81(uVar426 >> 0xf,0);
              bVar12 = (bool)((byte)uVar428 & 1);
              auVar749._0_4_ =
                   (uint)bVar12 * (bVar11 * in_ZMM19._0_4_ | (uint)!bVar11 * auVar730._0_4_) |
                   (uint)!bVar12 * (uint)((byte)uVar46 & 1) * auVar713._0_4_;
              bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
              auVar749._4_4_ =
                   (uint)bVar11 * (bVar13 * in_ZMM19._4_4_ | (uint)!bVar13 * auVar730._4_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 1) & 1) * auVar713._4_4_;
              bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
              auVar749._8_4_ =
                   (uint)bVar11 * (bVar14 * in_ZMM19._8_4_ | (uint)!bVar14 * auVar730._8_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 2) & 1) * auVar713._8_4_;
              bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
              auVar749._12_4_ =
                   (uint)bVar11 * (bVar15 * in_ZMM19._12_4_ | (uint)!bVar15 * auVar730._12_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 3) & 1) * auVar713._12_4_;
              bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
              auVar749._16_4_ =
                   (uint)bVar11 * (bVar16 * in_ZMM19._16_4_ | (uint)!bVar16 * auVar730._16_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 4) & 1) * auVar713._16_4_;
              bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
              auVar749._20_4_ =
                   (uint)bVar11 * (bVar17 * in_ZMM19._20_4_ | (uint)!bVar17 * auVar730._20_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 5) & 1) * auVar713._20_4_;
              bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
              auVar749._24_4_ =
                   (uint)bVar11 * (bVar18 * in_ZMM19._24_4_ | (uint)!bVar18 * auVar730._24_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 6) & 1) * auVar713._24_4_;
              bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
              auVar749._28_4_ =
                   (uint)bVar11 * (bVar19 * in_ZMM19._28_4_ | (uint)!bVar19 * auVar730._28_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 7) & 1) * auVar713._28_4_;
              bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
              auVar749._32_4_ =
                   (uint)bVar11 * (bVar20 * in_ZMM19._32_4_ | (uint)!bVar20 * auVar730._32_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 8) & 1) * auVar713._32_4_;
              bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
              auVar749._36_4_ =
                   (uint)bVar11 * (bVar21 * in_ZMM19._36_4_ | (uint)!bVar21 * auVar730._36_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 9) & 1) * auVar713._36_4_;
              bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
              auVar749._40_4_ =
                   (uint)bVar11 * (bVar22 * in_ZMM19._40_4_ | (uint)!bVar22 * auVar730._40_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 10) & 1) * auVar713._40_4_;
              bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
              auVar749._44_4_ =
                   (uint)bVar11 * (bVar23 * in_ZMM19._44_4_ | (uint)!bVar23 * auVar730._44_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xb) & 1) * auVar713._44_4_;
              bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
              auVar749._48_4_ =
                   (uint)bVar11 * (bVar24 * in_ZMM19._48_4_ | (uint)!bVar24 * auVar730._48_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xc) & 1) * auVar713._48_4_;
              bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
              auVar749._52_4_ =
                   (uint)bVar11 * (bVar25 * in_ZMM19._52_4_ | (uint)!bVar25 * auVar730._52_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xd) & 1) * auVar713._52_4_;
              bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
              auVar749._56_4_ =
                   (uint)bVar11 * (bVar26 * in_ZMM19._56_4_ | (uint)!bVar26 * auVar730._56_4_) |
                   (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xe) & 1) * auVar713._56_4_;
              bVar11 = SUB81(uVar428 >> 0xf,0);
              auVar749._60_4_ =
                   (uint)bVar11 * (bVar27 * in_ZMM19._60_4_ | (uint)!bVar27 * auVar730._60_4_) |
                   (uint)!bVar11 * (uint)(byte)(uVar46 >> 0xf) * auVar713._60_4_;
              ptr = (float *)((long)ptr + 0x40);
              *(undefined1 (*) [64])outptr = auVar749;
              ptr1 = ptr1 + 2;
              outptr = (float *)((long)outptr + 0x40);
              iVar423 = iVar423 + 2;
              auVar730 = in_ZMM20;
            } while (iVar423 < (int)uVar422);
            uVar424 = uVar422 & 0x7ffffffe;
          }
          iVar423 = uVar422 - uVar424;
          if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
            auVar462 = ZEXT816(0) << 0x40;
            auVar963._8_4_ = 0x80000000;
            auVar963._0_8_ = 0x8000000080000000;
            auVar963._12_4_ = 0x80000000;
            auVar963._16_4_ = 0x80000000;
            auVar963._20_4_ = 0x80000000;
            auVar963._24_4_ = 0x80000000;
            auVar963._28_4_ = 0x80000000;
            auVar1041._8_4_ = 0x40490fdb;
            auVar1041._0_8_ = 0x40490fdb40490fdb;
            auVar1041._12_4_ = 0x40490fdb;
            auVar1041._16_4_ = 0x40490fdb;
            auVar1041._20_4_ = 0x40490fdb;
            auVar1041._24_4_ = 0x40490fdb;
            auVar1041._28_4_ = 0x40490fdb;
            auVar1114._8_4_ = 0x7fffffff;
            auVar1114._0_8_ = 0x7fffffff7fffffff;
            auVar1114._12_4_ = 0x7fffffff;
            auVar1114._16_4_ = 0x7fffffff;
            auVar1114._20_4_ = 0x7fffffff;
            auVar1114._24_4_ = 0x7fffffff;
            auVar1114._28_4_ = 0x7fffffff;
            auVar1174._8_4_ = 0x3f800000;
            auVar1174._0_8_ = 0x3f8000003f800000;
            auVar1174._12_4_ = 0x3f800000;
            auVar1174._16_4_ = 0x3f800000;
            auVar1174._20_4_ = 0x3f800000;
            auVar1174._24_4_ = 0x3f800000;
            auVar1174._28_4_ = 0x3f800000;
            auVar1229._8_4_ = 0xbc83a25c;
            auVar1229._0_8_ = 0xbc83a25cbc83a25c;
            auVar1229._12_4_ = 0xbc83a25c;
            auVar1229._16_4_ = 0xbc83a25c;
            auVar1229._20_4_ = 0xbc83a25c;
            auVar1229._24_4_ = 0xbc83a25c;
            auVar1229._28_4_ = 0xbc83a25c;
            auVar1291._8_4_ = 0xbd99b01e;
            auVar1291._0_8_ = 0xbd99b01ebd99b01e;
            auVar1291._12_4_ = 0xbd99b01e;
            auVar1291._16_4_ = 0xbd99b01e;
            auVar1291._20_4_ = 0xbd99b01e;
            auVar1291._24_4_ = 0xbd99b01e;
            auVar1291._28_4_ = 0xbd99b01e;
            auVar1350._8_4_ = 0xbe117200;
            auVar1350._0_8_ = 0xbe117200be117200;
            auVar1350._12_4_ = 0xbe117200;
            auVar1350._16_4_ = 0xbe117200;
            auVar1350._20_4_ = 0xbe117200;
            auVar1350._24_4_ = 0xbe117200;
            auVar1350._28_4_ = 0xbe117200;
            auVar1406._8_4_ = 0xbeaaaa53;
            auVar1406._0_8_ = 0xbeaaaa53beaaaa53;
            auVar1406._12_4_ = 0xbeaaaa53;
            auVar1406._16_4_ = 0xbeaaaa53;
            auVar1406._20_4_ = 0xbeaaaa53;
            auVar1406._24_4_ = 0xbeaaaa53;
            auVar1406._28_4_ = 0xbeaaaa53;
            auVar1460._8_4_ = 0x3b3ac537;
            auVar1460._0_8_ = 0x3b3ac5373b3ac537;
            auVar1460._12_4_ = 0x3b3ac537;
            auVar1460._16_4_ = 0x3b3ac537;
            auVar1460._20_4_ = 0x3b3ac537;
            auVar1460._24_4_ = 0x3b3ac537;
            auVar1460._28_4_ = 0x3b3ac537;
            auVar1514._8_4_ = 0x3d2edd4e;
            auVar1514._0_8_ = 0x3d2edd4e3d2edd4e;
            auVar1514._12_4_ = 0x3d2edd4e;
            auVar1514._16_4_ = 0x3d2edd4e;
            auVar1514._20_4_ = 0x3d2edd4e;
            auVar1514._24_4_ = 0x3d2edd4e;
            auVar1514._28_4_ = 0x3d2edd4e;
            auVar1568._8_4_ = 0x3dd9ed24;
            auVar1568._0_8_ = 0x3dd9ed243dd9ed24;
            auVar1568._12_4_ = 0x3dd9ed24;
            auVar1568._16_4_ = 0x3dd9ed24;
            auVar1568._20_4_ = 0x3dd9ed24;
            auVar1568._24_4_ = 0x3dd9ed24;
            auVar1568._28_4_ = 0x3dd9ed24;
            auVar1622._8_4_ = 0x3e4cb974;
            auVar1622._0_8_ = 0x3e4cb9743e4cb974;
            auVar1622._12_4_ = 0x3e4cb974;
            auVar1622._16_4_ = 0x3e4cb974;
            auVar1622._20_4_ = 0x3e4cb974;
            auVar1622._24_4_ = 0x3e4cb974;
            auVar1622._28_4_ = 0x3e4cb974;
            auVar1676._8_4_ = 0x3fc90fdb;
            auVar1676._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar1676._12_4_ = 0x3fc90fdb;
            auVar1676._16_4_ = 0x3fc90fdb;
            auVar1676._20_4_ = 0x3fc90fdb;
            auVar1676._24_4_ = 0x3fc90fdb;
            auVar1676._28_4_ = 0x3fc90fdb;
            auVar1729._8_4_ = 0x40490fdb;
            auVar1729._0_8_ = 0x40490fdb40490fdb;
            auVar1729._12_4_ = 0x40490fdb;
            auVar1729._16_4_ = 0x40490fdb;
            auVar1729._20_4_ = 0x40490fdb;
            auVar1729._24_4_ = 0x40490fdb;
            auVar1729._28_4_ = 0x40490fdb;
            auVar1780._8_4_ = 0x3fc90fdb;
            auVar1780._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar1780._12_4_ = 0x3fc90fdb;
            auVar1780._16_4_ = 0x3fc90fdb;
            auVar1780._20_4_ = 0x3fc90fdb;
            auVar1780._24_4_ = 0x3fc90fdb;
            auVar1780._28_4_ = 0x3fc90fdb;
            do {
              auVar672 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
              auVar671 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
              auVar675 = vdivps_avx512vl(auVar672,auVar671);
              in_ZMM18 = ZEXT3264(auVar675);
              uVar46 = vcmpps_avx512vl(auVar672,ZEXT1632(auVar462),1);
              vandps_avx512vl(auVar675,auVar1114);
              auVar172._8_4_ = 0xc0490fdb;
              auVar172._0_8_ = 0xc0490fdbc0490fdb;
              auVar172._12_4_ = 0xc0490fdb;
              auVar172._16_4_ = 0xc0490fdb;
              auVar172._20_4_ = 0xc0490fdb;
              auVar172._24_4_ = 0xc0490fdb;
              auVar172._28_4_ = 0xc0490fdb;
              auVar684 = vblendmps_avx512vl(auVar1041,auVar172);
              bVar11 = (bool)((byte)uVar46 & 1);
              auVar580._0_4_ = (uint)bVar11 * auVar684._0_4_ | (uint)!bVar11 * in_ZMM20._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar580._4_4_ = (uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * in_ZMM20._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar580._8_4_ = (uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * in_ZMM20._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar580._12_4_ = (uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * in_ZMM20._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar580._16_4_ = (uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * in_ZMM20._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar580._20_4_ = (uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * in_ZMM20._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar580._24_4_ = (uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * in_ZMM20._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar580._28_4_ = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * in_ZMM20._28_4_;
              in_ZMM20 = ZEXT3264(auVar580);
              uVar46 = vcmpps_avx512vl(auVar1174,auVar675,1);
              auVar173._8_4_ = 0xbf800000;
              auVar173._0_8_ = 0xbf800000bf800000;
              auVar173._12_4_ = 0xbf800000;
              auVar173._16_4_ = 0xbf800000;
              auVar173._20_4_ = 0xbf800000;
              auVar173._24_4_ = 0xbf800000;
              auVar173._28_4_ = 0xbf800000;
              auVar684 = vblendmps_avx512vl(auVar675,auVar173);
              bVar28 = (byte)uVar46;
              auVar581._0_4_ =
                   (uint)(bVar28 & 1) * auVar684._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar581._4_4_ = (uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar581._8_4_ = (uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar581._12_4_ = (uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar581._16_4_ = (uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar581._20_4_ = (uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar581._24_4_ = (uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar581._28_4_ = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
              auVar684 = vdivps_avx512vl(auVar581,auVar675);
              auVar582._0_4_ =
                   (uint)(bVar28 & 1) * auVar684._0_4_ | !(bool)(bVar28 & 1) * auVar581._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar582._4_4_ = (uint)bVar11 * auVar684._4_4_ | !bVar11 * auVar581._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar582._8_4_ = (uint)bVar11 * auVar684._8_4_ | !bVar11 * auVar581._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar582._12_4_ = (uint)bVar11 * auVar684._12_4_ | !bVar11 * auVar581._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar582._16_4_ = (uint)bVar11 * auVar684._16_4_ | !bVar11 * auVar581._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar582._20_4_ = (uint)bVar11 * auVar684._20_4_ | !bVar11 * auVar581._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar582._24_4_ = (uint)bVar11 * auVar684._24_4_ | !bVar11 * auVar581._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar582._28_4_ = (uint)bVar11 * auVar684._28_4_ | !bVar11 * auVar581._28_4_;
              in_ZMM21 = ZEXT3264(auVar582);
              uVar426 = vcmpps_avx512vl(auVar672,ZEXT1632(auVar462),4);
              auVar680 = ZEXT1632(auVar462);
              uVar427 = vcmpps_avx512vl(auVar671,auVar680,1);
              auVar684 = vmulps_avx512vl(auVar582,auVar582);
              vandps_avx512vl(auVar672,auVar963);
              auVar672 = vmulps_avx512vl(auVar684,auVar684);
              auVar676 = vfmadd213ps_avx512vl(auVar1229,auVar672,auVar1291);
              auVar676 = vfmadd213ps_avx512vl(auVar676,auVar672,auVar1350);
              auVar677 = vfmadd213ps_avx512vl(auVar1460,auVar672,auVar1514);
              auVar677 = vfmadd213ps_avx512vl(auVar677,auVar672,auVar1568);
              auVar676 = vfmadd213ps_avx512vl(auVar676,auVar672,auVar1406);
              auVar677 = vfmadd213ps_avx512vl(auVar677,auVar672,auVar1622);
              auVar672 = vfmadd213ps_avx512vl(auVar677,auVar672,auVar1174);
              auVar672 = vfmadd231ps_avx512vl(auVar672,auVar684,auVar676);
              uVar428 = vcmpps_avx512vl(auVar671,auVar680,4);
              uVar428 = uVar426 & uVar428;
              auVar672 = vmulps_avx512vl(auVar672,auVar582);
              auVar676 = vaddps_avx512vl(auVar672,auVar1676);
              auVar583._0_4_ =
                   (uint)(bVar28 & 1) * auVar676._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar672._0_4_;
              bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
              auVar583._4_4_ = (uint)bVar11 * auVar676._4_4_ | (uint)!bVar11 * auVar672._4_4_;
              bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
              auVar583._8_4_ = (uint)bVar11 * auVar676._8_4_ | (uint)!bVar11 * auVar672._8_4_;
              bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
              auVar583._12_4_ = (uint)bVar11 * auVar676._12_4_ | (uint)!bVar11 * auVar672._12_4_;
              bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
              auVar583._16_4_ = (uint)bVar11 * auVar676._16_4_ | (uint)!bVar11 * auVar672._16_4_;
              bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
              auVar583._20_4_ = (uint)bVar11 * auVar676._20_4_ | (uint)!bVar11 * auVar672._20_4_;
              bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
              auVar583._24_4_ = (uint)bVar11 * auVar676._24_4_ | (uint)!bVar11 * auVar672._24_4_;
              bVar11 = SUB81(uVar46 >> 7,0);
              auVar583._28_4_ = (uint)bVar11 * auVar676._28_4_ | (uint)!bVar11 * auVar672._28_4_;
              auVar672 = vpternlogd_avx512vl(auVar583,auVar675,auVar963,0xf8);
              auVar675 = vaddps_avx512vl(auVar672,auVar580);
              bVar11 = (bool)((byte)uVar427 & 1);
              uVar424 = (uint)bVar11 * auVar675._0_4_ | (uint)!bVar11 * auVar672._0_4_;
              bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
              uVar872 = (uint)bVar11 * auVar675._4_4_ | (uint)!bVar11 * auVar672._4_4_;
              bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
              uVar873 = (uint)bVar11 * auVar675._8_4_ | (uint)!bVar11 * auVar672._8_4_;
              bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
              uVar874 = (uint)bVar11 * auVar675._12_4_ | (uint)!bVar11 * auVar672._12_4_;
              bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
              uVar875 = (uint)bVar11 * auVar675._16_4_ | (uint)!bVar11 * auVar672._16_4_;
              bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
              uVar876 = (uint)bVar11 * auVar675._20_4_ | (uint)!bVar11 * auVar672._20_4_;
              bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
              uVar877 = (uint)bVar11 * auVar675._24_4_ | (uint)!bVar11 * auVar672._24_4_;
              bVar11 = SUB81(uVar427 >> 7,0);
              uVar878 = (uint)bVar11 * auVar675._28_4_ | (uint)!bVar11 * auVar672._28_4_;
              in_ZMM19 = ZEXT3264(CONCAT428(uVar878,CONCAT424(uVar877,CONCAT420(uVar876,CONCAT416(
                                                  uVar875,CONCAT412(uVar874,CONCAT48(uVar873,
                                                  CONCAT44(uVar872,uVar424))))))));
              auVar671 = vpternlogd_avx512vl(auVar671,auVar1729,auVar963,0xec);
              uVar45 = vcmpps_avx512vl(auVar680,auVar671,2);
              auVar671 = vorps_avx512vl(auVar684,auVar1780);
              auVar584._4_4_ = (uint)((byte)(uVar426 >> 1) & 1) * auVar671._4_4_;
              auVar584._0_4_ = (uint)((byte)uVar426 & 1) * auVar671._0_4_;
              auVar584._8_4_ = (uint)((byte)(uVar426 >> 2) & 1) * auVar671._8_4_;
              auVar584._12_4_ = (uint)((byte)(uVar426 >> 3) & 1) * auVar671._12_4_;
              auVar584._16_4_ = (uint)((byte)(uVar426 >> 4) & 1) * auVar671._16_4_;
              auVar584._20_4_ = (uint)((byte)(uVar426 >> 5) & 1) * auVar671._20_4_;
              auVar584._24_4_ = (uint)((byte)(uVar426 >> 6) & 1) * auVar671._24_4_;
              auVar584._28_4_ = (uint)(byte)(uVar426 >> 7) * auVar671._28_4_;
              bVar28 = (byte)uVar426 | (byte)uVar45;
              auVar671 = vorps_avx512vl(auVar584,auVar1729);
              auVar672 = vmovdqa32_avx512vl(auVar584);
              bVar12 = (bool)(bVar28 >> 1 & 1);
              bVar13 = (bool)(bVar28 >> 2 & 1);
              bVar14 = (bool)(bVar28 >> 3 & 1);
              bVar15 = (bool)(bVar28 >> 4 & 1);
              bVar16 = (bool)(bVar28 >> 5 & 1);
              bVar17 = (bool)(bVar28 >> 6 & 1);
              bVar11 = (bool)((byte)uVar428 & 1);
              auVar585._0_4_ =
                   bVar11 * uVar424 |
                   (uint)!bVar11 *
                   ((uint)(bVar28 & 1) * auVar672._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar671._0_4_
                   );
              bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
              auVar585._4_4_ =
                   bVar11 * uVar872 |
                   (uint)!bVar11 * ((uint)bVar12 * auVar672._4_4_ | (uint)!bVar12 * auVar671._4_4_);
              bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
              auVar585._8_4_ =
                   bVar11 * uVar873 |
                   (uint)!bVar11 * ((uint)bVar13 * auVar672._8_4_ | (uint)!bVar13 * auVar671._8_4_);
              bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
              auVar585._12_4_ =
                   bVar11 * uVar874 |
                   (uint)!bVar11 *
                   ((uint)bVar14 * auVar672._12_4_ | (uint)!bVar14 * auVar671._12_4_);
              bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
              auVar585._16_4_ =
                   bVar11 * uVar875 |
                   (uint)!bVar11 *
                   ((uint)bVar15 * auVar672._16_4_ | (uint)!bVar15 * auVar671._16_4_);
              bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
              auVar585._20_4_ =
                   bVar11 * uVar876 |
                   (uint)!bVar11 *
                   ((uint)bVar16 * auVar672._20_4_ | (uint)!bVar16 * auVar671._20_4_);
              bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
              auVar585._24_4_ =
                   bVar11 * uVar877 |
                   (uint)!bVar11 *
                   ((uint)bVar17 * auVar672._24_4_ | (uint)!bVar17 * auVar671._24_4_);
              bVar11 = SUB81(uVar428 >> 7,0);
              auVar585._28_4_ =
                   bVar11 * uVar878 |
                   (uint)!bVar11 *
                   ((uint)(bVar28 >> 7) * auVar672._28_4_ |
                   (uint)!(bool)(bVar28 >> 7) * auVar671._28_4_);
              *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar585;
              ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
              ptr1 = ptr1 + 1;
              outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
              iVar423 = iVar423 + -1;
            } while (iVar423 != 0);
          }
        }
        if (iVar421 != 4) {
          return;
        }
        uVar424 = 0;
        if (3 < (int)uVar422) {
          iVar421 = 3;
          auVar726 = ZEXT1664(ZEXT816(0) << 0x40);
          auVar730 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar712 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar713 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar714 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar715 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar716 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar724 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar725 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          do {
            auVar462 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
            auVar492 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
            auVar1755 = *(undefined1 (*) [64])ptr;
            auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar671 = vinsertf32x4_avx512vl(ZEXT1632(auVar462),auVar492,1);
            auVar462 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar672 = vinsertf32x4_avx512vl(ZEXT1632(auVar493),auVar462,1);
            auVar732 = vinsertf64x4_avx512f(ZEXT3264(auVar672),auVar671,1);
            auVar845 = vdivps_avx512f(auVar732,auVar1755);
            uVar46 = vcmpps_avx512f(auVar732,auVar726,1);
            auVar729 = vandps_avx512dq(auVar845,auVar713);
            auVar331._8_4_ = 0xc0490fdb;
            auVar331._0_8_ = 0xc0490fdbc0490fdb;
            auVar331._12_4_ = 0xc0490fdb;
            auVar331._16_4_ = 0xc0490fdb;
            auVar331._20_4_ = 0xc0490fdb;
            auVar331._24_4_ = 0xc0490fdb;
            auVar331._28_4_ = 0xc0490fdb;
            auVar331._32_4_ = 0xc0490fdb;
            auVar331._36_4_ = 0xc0490fdb;
            auVar331._40_4_ = 0xc0490fdb;
            auVar331._44_4_ = 0xc0490fdb;
            auVar331._48_4_ = 0xc0490fdb;
            auVar331._52_4_ = 0xc0490fdb;
            auVar331._56_4_ = 0xc0490fdb;
            auVar331._60_4_ = 0xc0490fdb;
            auVar727 = vblendmps_avx512f(auVar712,auVar331);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar750._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * in_ZMM20._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar750._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * in_ZMM20._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar750._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * in_ZMM20._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar750._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * in_ZMM20._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar750._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * in_ZMM20._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar750._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * in_ZMM20._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar750._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * in_ZMM20._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar750._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * in_ZMM20._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar750._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * in_ZMM20._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar750._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * in_ZMM20._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar750._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * in_ZMM20._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar750._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * in_ZMM20._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar750._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * in_ZMM20._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar750._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * in_ZMM20._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar750._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * in_ZMM20._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar750._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * in_ZMM20._60_4_;
            uVar46 = vcmpps_avx512f(auVar714,auVar729,1);
            auVar332._8_4_ = 0xbf800000;
            auVar332._0_8_ = 0xbf800000bf800000;
            auVar332._12_4_ = 0xbf800000;
            auVar332._16_4_ = 0xbf800000;
            auVar332._20_4_ = 0xbf800000;
            auVar332._24_4_ = 0xbf800000;
            auVar332._28_4_ = 0xbf800000;
            auVar332._32_4_ = 0xbf800000;
            auVar332._36_4_ = 0xbf800000;
            auVar332._40_4_ = 0xbf800000;
            auVar332._44_4_ = 0xbf800000;
            auVar332._48_4_ = 0xbf800000;
            auVar332._52_4_ = 0xbf800000;
            auVar332._56_4_ = 0xbf800000;
            auVar332._60_4_ = 0xbf800000;
            auVar727 = vblendmps_avx512f(auVar729,auVar332);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar751._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar751._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar751._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar751._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar751._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar751._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar751._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar751._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
            bVar28 = (byte)(uVar46 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar751._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * in_ZMM21._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar751._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * in_ZMM21._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar751._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * in_ZMM21._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar751._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * in_ZMM21._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar751._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * in_ZMM21._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar751._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * in_ZMM21._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar751._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * in_ZMM21._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar751._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * in_ZMM21._60_4_;
            auVar729 = vmaxps_avx512f(auVar729,auVar714);
            auVar729 = vdivps_avx512f(auVar751,auVar729);
            uVar426 = vcmpps_avx512f(auVar1755,auVar726,4);
            in_ZMM21 = vmulps_avx512f(auVar729,auVar729);
            uVar427 = vcmpps_avx512f(auVar1755,auVar726,1);
            auVar727 = vmulps_avx512f(in_ZMM21,in_ZMM21);
            auVar728 = vfmadd213ps_avx512f(auVar715,auVar727,auVar716);
            auVar728 = vfmadd213ps_avx512f(auVar728,auVar727,auVar717);
            auVar731 = vfmadd213ps_avx512f(auVar719,auVar727,auVar720);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar727,auVar721);
            auVar728 = vfmadd213ps_avx512f(auVar728,auVar727,auVar718);
            auVar731 = vfmadd213ps_avx512f(auVar731,auVar727,auVar722);
            auVar727 = vfmadd213ps_avx512f(auVar731,auVar727,auVar714);
            auVar727 = vfmadd231ps_avx512f(auVar727,in_ZMM21,auVar728);
            uVar428 = vcmpps_avx512f(auVar732,auVar726,4);
            auVar729 = vmulps_avx512f(auVar727,auVar729);
            auVar727 = vaddps_avx512f(auVar729,auVar723);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar752._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar729._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar752._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar729._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar752._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar729._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar752._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar729._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar752._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar729._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar752._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar729._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar752._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar729._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar752._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar729._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar752._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar729._32_4_;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar752._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar729._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar752._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar729._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar752._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar729._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar752._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar729._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar752._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar729._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar752._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar729._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar752._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar729._60_4_;
            auVar845 = vpternlogd_avx512f(auVar752,auVar845,auVar730,0xf8);
            auVar729 = vaddps_avx512f(auVar845,auVar750);
            bVar11 = (bool)((byte)uVar427 & 1);
            in_ZMM19._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_;
            bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
            in_ZMM19._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar845._4_4_;
            bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
            in_ZMM19._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar845._8_4_;
            bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
            in_ZMM19._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar845._12_4_;
            bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
            in_ZMM19._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar845._16_4_;
            bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
            in_ZMM19._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar845._20_4_;
            bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
            in_ZMM19._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar845._24_4_;
            bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
            in_ZMM19._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar845._28_4_;
            bVar11 = (bool)((byte)(uVar427 >> 8) & 1);
            in_ZMM19._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar845._32_4_;
            bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
            in_ZMM19._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar845._36_4_;
            bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
            in_ZMM19._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar845._40_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
            in_ZMM19._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar845._44_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
            in_ZMM19._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar845._48_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
            in_ZMM19._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar845._52_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
            in_ZMM19._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar845._56_4_;
            bVar11 = SUB81(uVar427 >> 0xf,0);
            in_ZMM19._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar845._60_4_;
            in_ZMM18 = vpternlogd_avx512f(auVar1755,auVar730,auVar724,0xea);
            uVar46 = vcmpps_avx512f(in_ZMM18,auVar726,1);
            auVar1755 = vpternlogd_avx512f(auVar732,auVar730,auVar725,0xea);
            bVar11 = (bool)((byte)uVar426 & 1);
            bVar13 = (bool)((byte)(uVar426 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar426 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar426 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar426 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar426 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar426 >> 6) & 1);
            bVar19 = (bool)((byte)(uVar426 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar426 >> 8) & 1);
            bVar21 = (bool)((byte)(uVar426 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar426 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar426 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar426 >> 0xc) & 1);
            bVar25 = (bool)((byte)(uVar426 >> 0xd) & 1);
            bVar26 = (bool)((byte)(uVar426 >> 0xe) & 1);
            bVar27 = SUB81(uVar426 >> 0xf,0);
            bVar12 = (bool)((byte)uVar428 & 1);
            auVar753._0_4_ =
                 (uint)bVar12 * (bVar11 * in_ZMM19._0_4_ | (uint)!bVar11 * auVar1755._0_4_) |
                 (uint)!bVar12 * (uint)((byte)uVar46 & 1) * auVar712._0_4_;
            bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
            auVar753._4_4_ =
                 (uint)bVar11 * (bVar13 * in_ZMM19._4_4_ | (uint)!bVar13 * auVar1755._4_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 1) & 1) * auVar712._4_4_;
            bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
            auVar753._8_4_ =
                 (uint)bVar11 * (bVar14 * in_ZMM19._8_4_ | (uint)!bVar14 * auVar1755._8_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 2) & 1) * auVar712._8_4_;
            bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
            auVar753._12_4_ =
                 (uint)bVar11 * (bVar15 * in_ZMM19._12_4_ | (uint)!bVar15 * auVar1755._12_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 3) & 1) * auVar712._12_4_;
            bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
            auVar753._16_4_ =
                 (uint)bVar11 * (bVar16 * in_ZMM19._16_4_ | (uint)!bVar16 * auVar1755._16_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 4) & 1) * auVar712._16_4_;
            bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
            auVar753._20_4_ =
                 (uint)bVar11 * (bVar17 * in_ZMM19._20_4_ | (uint)!bVar17 * auVar1755._20_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 5) & 1) * auVar712._20_4_;
            bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
            auVar753._24_4_ =
                 (uint)bVar11 * (bVar18 * in_ZMM19._24_4_ | (uint)!bVar18 * auVar1755._24_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 6) & 1) * auVar712._24_4_;
            bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
            auVar753._28_4_ =
                 (uint)bVar11 * (bVar19 * in_ZMM19._28_4_ | (uint)!bVar19 * auVar1755._28_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 7) & 1) * auVar712._28_4_;
            bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
            auVar753._32_4_ =
                 (uint)bVar11 * (bVar20 * in_ZMM19._32_4_ | (uint)!bVar20 * auVar1755._32_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 8) & 1) * auVar712._32_4_;
            bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
            auVar753._36_4_ =
                 (uint)bVar11 * (bVar21 * in_ZMM19._36_4_ | (uint)!bVar21 * auVar1755._36_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 9) & 1) * auVar712._36_4_;
            bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
            auVar753._40_4_ =
                 (uint)bVar11 * (bVar22 * in_ZMM19._40_4_ | (uint)!bVar22 * auVar1755._40_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 10) & 1) * auVar712._40_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
            auVar753._44_4_ =
                 (uint)bVar11 * (bVar23 * in_ZMM19._44_4_ | (uint)!bVar23 * auVar1755._44_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xb) & 1) * auVar712._44_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
            auVar753._48_4_ =
                 (uint)bVar11 * (bVar24 * in_ZMM19._48_4_ | (uint)!bVar24 * auVar1755._48_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xc) & 1) * auVar712._48_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
            auVar753._52_4_ =
                 (uint)bVar11 * (bVar25 * in_ZMM19._52_4_ | (uint)!bVar25 * auVar1755._52_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xd) & 1) * auVar712._52_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
            auVar753._56_4_ =
                 (uint)bVar11 * (bVar26 * in_ZMM19._56_4_ | (uint)!bVar26 * auVar1755._56_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xe) & 1) * auVar712._56_4_;
            bVar11 = SUB81(uVar428 >> 0xf,0);
            auVar753._60_4_ =
                 (uint)bVar11 * (bVar27 * in_ZMM19._60_4_ | (uint)!bVar27 * auVar1755._60_4_) |
                 (uint)!bVar11 * (uint)(byte)(uVar46 >> 0xf) * auVar712._60_4_;
            ptr = (float *)((long)ptr + 0x40);
            *(undefined1 (*) [64])outptr = auVar753;
            ptr1 = ptr1 + 4;
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 4;
            in_ZMM20 = auVar750;
          } while (iVar421 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffc;
        }
        if ((int)(uVar424 | 1) < (int)uVar422) {
          auVar462 = ZEXT816(0) << 0x40;
          auVar964._8_4_ = 0x80000000;
          auVar964._0_8_ = 0x8000000080000000;
          auVar964._12_4_ = 0x80000000;
          auVar964._16_4_ = 0x80000000;
          auVar964._20_4_ = 0x80000000;
          auVar964._24_4_ = 0x80000000;
          auVar964._28_4_ = 0x80000000;
          auVar1042._8_4_ = 0x40490fdb;
          auVar1042._0_8_ = 0x40490fdb40490fdb;
          auVar1042._12_4_ = 0x40490fdb;
          auVar1042._16_4_ = 0x40490fdb;
          auVar1042._20_4_ = 0x40490fdb;
          auVar1042._24_4_ = 0x40490fdb;
          auVar1042._28_4_ = 0x40490fdb;
          auVar1115._8_4_ = 0x7fffffff;
          auVar1115._0_8_ = 0x7fffffff7fffffff;
          auVar1115._12_4_ = 0x7fffffff;
          auVar1115._16_4_ = 0x7fffffff;
          auVar1115._20_4_ = 0x7fffffff;
          auVar1115._24_4_ = 0x7fffffff;
          auVar1115._28_4_ = 0x7fffffff;
          auVar1175._8_4_ = 0x3f800000;
          auVar1175._0_8_ = 0x3f8000003f800000;
          auVar1175._12_4_ = 0x3f800000;
          auVar1175._16_4_ = 0x3f800000;
          auVar1175._20_4_ = 0x3f800000;
          auVar1175._24_4_ = 0x3f800000;
          auVar1175._28_4_ = 0x3f800000;
          auVar1230._8_4_ = 0xbc83a25c;
          auVar1230._0_8_ = 0xbc83a25cbc83a25c;
          auVar1230._12_4_ = 0xbc83a25c;
          auVar1230._16_4_ = 0xbc83a25c;
          auVar1230._20_4_ = 0xbc83a25c;
          auVar1230._24_4_ = 0xbc83a25c;
          auVar1230._28_4_ = 0xbc83a25c;
          auVar1292._8_4_ = 0xbd99b01e;
          auVar1292._0_8_ = 0xbd99b01ebd99b01e;
          auVar1292._12_4_ = 0xbd99b01e;
          auVar1292._16_4_ = 0xbd99b01e;
          auVar1292._20_4_ = 0xbd99b01e;
          auVar1292._24_4_ = 0xbd99b01e;
          auVar1292._28_4_ = 0xbd99b01e;
          auVar1351._8_4_ = 0xbe117200;
          auVar1351._0_8_ = 0xbe117200be117200;
          auVar1351._12_4_ = 0xbe117200;
          auVar1351._16_4_ = 0xbe117200;
          auVar1351._20_4_ = 0xbe117200;
          auVar1351._24_4_ = 0xbe117200;
          auVar1351._28_4_ = 0xbe117200;
          auVar1407._8_4_ = 0xbeaaaa53;
          auVar1407._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1407._12_4_ = 0xbeaaaa53;
          auVar1407._16_4_ = 0xbeaaaa53;
          auVar1407._20_4_ = 0xbeaaaa53;
          auVar1407._24_4_ = 0xbeaaaa53;
          auVar1407._28_4_ = 0xbeaaaa53;
          auVar1461._8_4_ = 0x3b3ac537;
          auVar1461._0_8_ = 0x3b3ac5373b3ac537;
          auVar1461._12_4_ = 0x3b3ac537;
          auVar1461._16_4_ = 0x3b3ac537;
          auVar1461._20_4_ = 0x3b3ac537;
          auVar1461._24_4_ = 0x3b3ac537;
          auVar1461._28_4_ = 0x3b3ac537;
          auVar1515._8_4_ = 0x3d2edd4e;
          auVar1515._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1515._12_4_ = 0x3d2edd4e;
          auVar1515._16_4_ = 0x3d2edd4e;
          auVar1515._20_4_ = 0x3d2edd4e;
          auVar1515._24_4_ = 0x3d2edd4e;
          auVar1515._28_4_ = 0x3d2edd4e;
          auVar1569._8_4_ = 0x3dd9ed24;
          auVar1569._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1569._12_4_ = 0x3dd9ed24;
          auVar1569._16_4_ = 0x3dd9ed24;
          auVar1569._20_4_ = 0x3dd9ed24;
          auVar1569._24_4_ = 0x3dd9ed24;
          auVar1569._28_4_ = 0x3dd9ed24;
          auVar1623._8_4_ = 0x3e4cb974;
          auVar1623._0_8_ = 0x3e4cb9743e4cb974;
          auVar1623._12_4_ = 0x3e4cb974;
          auVar1623._16_4_ = 0x3e4cb974;
          auVar1623._20_4_ = 0x3e4cb974;
          auVar1623._24_4_ = 0x3e4cb974;
          auVar1623._28_4_ = 0x3e4cb974;
          auVar1677._8_4_ = 0x3fc90fdb;
          auVar1677._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1677._12_4_ = 0x3fc90fdb;
          auVar1677._16_4_ = 0x3fc90fdb;
          auVar1677._20_4_ = 0x3fc90fdb;
          auVar1677._24_4_ = 0x3fc90fdb;
          auVar1677._28_4_ = 0x3fc90fdb;
          auVar1730._8_4_ = 0x40490fdb;
          auVar1730._0_8_ = 0x40490fdb40490fdb;
          auVar1730._12_4_ = 0x40490fdb;
          auVar1730._16_4_ = 0x40490fdb;
          auVar1730._20_4_ = 0x40490fdb;
          auVar1730._24_4_ = 0x40490fdb;
          auVar1730._28_4_ = 0x40490fdb;
          auVar1781._8_4_ = 0x3fc90fdb;
          auVar1781._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1781._12_4_ = 0x3fc90fdb;
          auVar1781._16_4_ = 0x3fc90fdb;
          auVar1781._20_4_ = 0x3fc90fdb;
          auVar1781._24_4_ = 0x3fc90fdb;
          auVar1781._28_4_ = 0x3fc90fdb;
          uVar872 = uVar424;
          do {
            auVar492 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar671 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
            auVar672 = vinsertf32x4_avx512vl(ZEXT1632(auVar492),auVar493,1);
            auVar675 = vdivps_avx512vl(auVar672,auVar671);
            uVar46 = vcmpps_avx512vl(auVar672,ZEXT1632(auVar462),1);
            auVar174._8_4_ = 0xc0490fdb;
            auVar174._0_8_ = 0xc0490fdbc0490fdb;
            auVar174._12_4_ = 0xc0490fdb;
            auVar174._16_4_ = 0xc0490fdb;
            auVar174._20_4_ = 0xc0490fdb;
            auVar174._24_4_ = 0xc0490fdb;
            auVar174._28_4_ = 0xc0490fdb;
            auVar684 = vblendmps_avx512vl(auVar1042,auVar174);
            bVar11 = (bool)((byte)uVar46 & 1);
            auVar586._0_4_ = (uint)bVar11 * auVar684._0_4_ | (uint)!bVar11 * in_ZMM19._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar586._4_4_ = (uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * in_ZMM19._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar586._8_4_ = (uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * in_ZMM19._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar586._12_4_ = (uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * in_ZMM19._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar586._16_4_ = (uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * in_ZMM19._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar586._20_4_ = (uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * in_ZMM19._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar586._24_4_ = (uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * in_ZMM19._24_4_;
            bVar11 = SUB81(uVar46 >> 7,0);
            auVar586._28_4_ = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * in_ZMM19._28_4_;
            in_ZMM19 = ZEXT3264(auVar586);
            uVar46 = vcmpps_avx512vl(auVar671,ZEXT1632(auVar462),1);
            vandps_avx512vl(auVar675,auVar1115);
            uVar426 = vcmpps_avx512vl(auVar1175,auVar586,1);
            auVar175._8_4_ = 0xbf800000;
            auVar175._0_8_ = 0xbf800000bf800000;
            auVar175._12_4_ = 0xbf800000;
            auVar175._16_4_ = 0xbf800000;
            auVar175._20_4_ = 0xbf800000;
            auVar175._24_4_ = 0xbf800000;
            auVar175._28_4_ = 0xbf800000;
            auVar684 = vblendmps_avx512vl(auVar586,auVar175);
            bVar28 = (byte)uVar426;
            auVar587._0_4_ =
                 (uint)(bVar28 & 1) * auVar684._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar587._4_4_ = (uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar587._8_4_ = (uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar587._12_4_ = (uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar587._16_4_ = (uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar587._20_4_ = (uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar587._24_4_ = (uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar587._28_4_ = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
            auVar680 = ZEXT1632(auVar462);
            uVar427 = vcmpps_avx512vl(auVar672,auVar680,4);
            auVar684 = vdivps_avx512vl(auVar587,auVar586);
            auVar588._0_4_ =
                 (uint)(bVar28 & 1) * auVar684._0_4_ | !(bool)(bVar28 & 1) * auVar587._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar588._4_4_ = (uint)bVar11 * auVar684._4_4_ | !bVar11 * auVar587._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar588._8_4_ = (uint)bVar11 * auVar684._8_4_ | !bVar11 * auVar587._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar588._12_4_ = (uint)bVar11 * auVar684._12_4_ | !bVar11 * auVar587._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar588._16_4_ = (uint)bVar11 * auVar684._16_4_ | !bVar11 * auVar587._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar588._20_4_ = (uint)bVar11 * auVar684._20_4_ | !bVar11 * auVar587._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar588._24_4_ = (uint)bVar11 * auVar684._24_4_ | !bVar11 * auVar587._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar588._28_4_ = (uint)bVar11 * auVar684._28_4_ | !bVar11 * auVar587._28_4_;
            in_ZMM21 = ZEXT3264(auVar588);
            vandps_avx512vl(auVar672,auVar964);
            auVar672 = vmulps_avx512vl(auVar588,auVar588);
            auVar684 = vmulps_avx512vl(auVar672,auVar672);
            auVar676 = vfmadd213ps_avx512vl(auVar1230,auVar684,auVar1292);
            auVar676 = vfmadd213ps_avx512vl(auVar676,auVar684,auVar1351);
            auVar677 = vfmadd213ps_avx512vl(auVar1461,auVar684,auVar1515);
            auVar676 = vfmadd213ps_avx512vl(auVar676,auVar684,auVar1407);
            auVar677 = vfmadd213ps_avx512vl(auVar677,auVar684,auVar1569);
            auVar677 = vfmadd213ps_avx512vl(auVar677,auVar684,auVar1623);
            auVar684 = vfmadd213ps_avx512vl(auVar677,auVar684,auVar1175);
            uVar428 = vcmpps_avx512vl(auVar671,auVar680,4);
            uVar428 = uVar427 & uVar428;
            auVar672 = vfmadd231ps_avx512vl(auVar684,auVar672,auVar676);
            auVar672 = vmulps_avx512vl(auVar672,auVar588);
            auVar684 = vaddps_avx512vl(auVar672,auVar1677);
            auVar589._0_4_ =
                 (uint)(bVar28 & 1) * auVar684._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar672._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar589._4_4_ = (uint)bVar11 * auVar684._4_4_ | (uint)!bVar11 * auVar672._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar589._8_4_ = (uint)bVar11 * auVar684._8_4_ | (uint)!bVar11 * auVar672._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar589._12_4_ = (uint)bVar11 * auVar684._12_4_ | (uint)!bVar11 * auVar672._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar589._16_4_ = (uint)bVar11 * auVar684._16_4_ | (uint)!bVar11 * auVar672._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar589._20_4_ = (uint)bVar11 * auVar684._20_4_ | (uint)!bVar11 * auVar672._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar589._24_4_ = (uint)bVar11 * auVar684._24_4_ | (uint)!bVar11 * auVar672._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar589._28_4_ = (uint)bVar11 * auVar684._28_4_ | (uint)!bVar11 * auVar672._28_4_;
            auVar672 = vpternlogd_avx512vl(auVar589,auVar675,auVar964,0xf8);
            auVar671 = vpternlogd_avx512vl(auVar671,auVar1730,auVar964,0xec);
            in_ZMM18 = ZEXT3264(auVar671);
            uVar45 = vcmpps_avx512vl(auVar680,auVar671,2);
            auVar671 = vorps_avx512vl(auVar588,auVar1781);
            auVar590._4_4_ = (uint)((byte)(uVar427 >> 1) & 1) * auVar671._4_4_;
            auVar590._0_4_ = (uint)((byte)uVar427 & 1) * auVar671._0_4_;
            auVar590._8_4_ = (uint)((byte)(uVar427 >> 2) & 1) * auVar671._8_4_;
            auVar590._12_4_ = (uint)((byte)(uVar427 >> 3) & 1) * auVar671._12_4_;
            auVar590._16_4_ = (uint)((byte)(uVar427 >> 4) & 1) * auVar671._16_4_;
            auVar590._20_4_ = (uint)((byte)(uVar427 >> 5) & 1) * auVar671._20_4_;
            auVar590._24_4_ = (uint)((byte)(uVar427 >> 6) & 1) * auVar671._24_4_;
            auVar590._28_4_ = (uint)(byte)(uVar427 >> 7) * auVar671._28_4_;
            auVar671 = vaddps_avx512vl(auVar672,auVar586);
            bVar11 = (bool)((byte)uVar46 & 1);
            bVar13 = (bool)((byte)(uVar46 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar46 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar46 >> 4) & 1);
            bVar21 = (bool)((byte)(uVar46 >> 5) & 1);
            bVar23 = (bool)((byte)(uVar46 >> 6) & 1);
            bVar25 = SUB81(uVar46 >> 7,0);
            bVar28 = (byte)uVar427 | (byte)uVar45;
            auVar675 = vorps_avx512vl(auVar590,auVar1730);
            auVar684 = vmovdqa32_avx512vl(auVar590);
            bVar14 = (bool)(bVar28 >> 1 & 1);
            bVar16 = (bool)(bVar28 >> 2 & 1);
            bVar18 = (bool)(bVar28 >> 3 & 1);
            bVar20 = (bool)(bVar28 >> 4 & 1);
            bVar22 = (bool)(bVar28 >> 5 & 1);
            bVar24 = (bool)(bVar28 >> 6 & 1);
            bVar12 = (bool)((byte)uVar428 & 1);
            auVar591._0_4_ =
                 (uint)bVar12 * ((uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * auVar672._0_4_) |
                 (uint)!bVar12 *
                 ((uint)(bVar28 & 1) * auVar684._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar675._0_4_);
            bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
            auVar591._4_4_ =
                 (uint)bVar11 * ((uint)bVar13 * auVar671._4_4_ | (uint)!bVar13 * auVar672._4_4_) |
                 (uint)!bVar11 * ((uint)bVar14 * auVar684._4_4_ | (uint)!bVar14 * auVar675._4_4_);
            bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
            auVar591._8_4_ =
                 (uint)bVar11 * ((uint)bVar15 * auVar671._8_4_ | (uint)!bVar15 * auVar672._8_4_) |
                 (uint)!bVar11 * ((uint)bVar16 * auVar684._8_4_ | (uint)!bVar16 * auVar675._8_4_);
            bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
            auVar591._12_4_ =
                 (uint)bVar11 * ((uint)bVar17 * auVar671._12_4_ | (uint)!bVar17 * auVar672._12_4_) |
                 (uint)!bVar11 * ((uint)bVar18 * auVar684._12_4_ | (uint)!bVar18 * auVar675._12_4_);
            bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
            auVar591._16_4_ =
                 (uint)bVar11 * ((uint)bVar19 * auVar671._16_4_ | (uint)!bVar19 * auVar672._16_4_) |
                 (uint)!bVar11 * ((uint)bVar20 * auVar684._16_4_ | (uint)!bVar20 * auVar675._16_4_);
            bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
            auVar591._20_4_ =
                 (uint)bVar11 * ((uint)bVar21 * auVar671._20_4_ | (uint)!bVar21 * auVar672._20_4_) |
                 (uint)!bVar11 * ((uint)bVar22 * auVar684._20_4_ | (uint)!bVar22 * auVar675._20_4_);
            bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
            auVar591._24_4_ =
                 (uint)bVar11 * ((uint)bVar23 * auVar671._24_4_ | (uint)!bVar23 * auVar672._24_4_) |
                 (uint)!bVar11 * ((uint)bVar24 * auVar684._24_4_ | (uint)!bVar24 * auVar675._24_4_);
            bVar11 = SUB81(uVar428 >> 7,0);
            auVar591._28_4_ =
                 (uint)bVar11 * ((uint)bVar25 * auVar671._28_4_ | (uint)!bVar25 * auVar672._28_4_) |
                 (uint)!bVar11 *
                 ((uint)(bVar28 >> 7) * auVar684._28_4_ |
                 (uint)!(bool)(bVar28 >> 7) * auVar675._28_4_);
            *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar591;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar424 = uVar872 + 2;
            iVar421 = uVar872 + 3;
            uVar872 = uVar424;
          } while (iVar421 < (int)uVar422);
        }
        iVar421 = uVar422 - uVar424;
        if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
          return;
        }
        lVar425 = 0;
        auVar462 = ZEXT816(0) << 0x40;
        auVar933._8_4_ = 0x80000000;
        auVar933._0_8_ = 0x8000000080000000;
        auVar933._12_4_ = 0x80000000;
        auVar1016._8_4_ = 0x40490fdb;
        auVar1016._0_8_ = 0x40490fdb40490fdb;
        auVar1016._12_4_ = 0x40490fdb;
        auVar1095._8_4_ = 0x7fffffff;
        auVar1095._0_8_ = 0x7fffffff7fffffff;
        auVar1095._12_4_ = 0x7fffffff;
        auVar1148._8_4_ = 0x3f800000;
        auVar1148._0_8_ = 0x3f8000003f800000;
        auVar1148._12_4_ = 0x3f800000;
        auVar1201._8_4_ = 0xbc83a25c;
        auVar1201._0_8_ = 0xbc83a25cbc83a25c;
        auVar1201._12_4_ = 0xbc83a25c;
        auVar1265._8_4_ = 0xbd99b01e;
        auVar1265._0_8_ = 0xbd99b01ebd99b01e;
        auVar1265._12_4_ = 0xbd99b01e;
        auVar1328._8_4_ = 0xbe117200;
        auVar1328._0_8_ = 0xbe117200be117200;
        auVar1328._12_4_ = 0xbe117200;
        auVar1384._8_4_ = 0xbeaaaa53;
        auVar1384._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1384._12_4_ = 0xbeaaaa53;
        auVar1438._8_4_ = 0x3b3ac537;
        auVar1438._0_8_ = 0x3b3ac5373b3ac537;
        auVar1438._12_4_ = 0x3b3ac537;
        auVar1492._8_4_ = 0x3d2edd4e;
        auVar1492._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1492._12_4_ = 0x3d2edd4e;
        auVar1546._8_4_ = 0x3dd9ed24;
        auVar1546._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1546._12_4_ = 0x3dd9ed24;
        auVar1600._8_4_ = 0x3e4cb974;
        auVar1600._0_8_ = 0x3e4cb9743e4cb974;
        auVar1600._12_4_ = 0x3e4cb974;
        auVar1654._8_4_ = 0x3fc90fdb;
        auVar1654._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1654._12_4_ = 0x3fc90fdb;
        auVar1708._8_4_ = 0x40490fdb;
        auVar1708._0_8_ = 0x40490fdb40490fdb;
        auVar1708._12_4_ = 0x40490fdb;
        auVar1761._8_4_ = 0x3fc90fdb;
        auVar1761._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1761._12_4_ = 0x3fc90fdb;
        do {
          auVar492 = *(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4);
          auVar493 = vbroadcastss_avx512vl(ZEXT416(*(uint *)((long)ptr1 + lVar425)));
          uVar46 = vcmpps_avx512vl(auVar493,auVar462,4);
          uVar426 = vcmpps_avx512vl(auVar493,auVar462,1);
          auVar53._8_4_ = 0xc0490fdb;
          auVar53._0_8_ = 0xc0490fdbc0490fdb;
          auVar53._12_4_ = 0xc0490fdb;
          auVar516 = vblendmps_avx512vl(auVar1016,auVar53);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar463._0_4_ = (uint)bVar11 * auVar516._0_4_ | (uint)!bVar11 * in_ZMM18._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar463._4_4_ = (uint)bVar11 * auVar516._4_4_ | (uint)!bVar11 * in_ZMM18._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar463._8_4_ = (uint)bVar11 * auVar516._8_4_ | (uint)!bVar11 * in_ZMM18._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar463._12_4_ = (uint)bVar11 * auVar516._12_4_ | (uint)!bVar11 * in_ZMM18._12_4_;
          in_ZMM18 = ZEXT1664(auVar463);
          uVar426 = vcmpps_avx512vl(auVar492,auVar462,4);
          uVar426 = uVar46 & uVar426;
          auVar516 = vandps_avx512vl(auVar493,auVar933);
          auVar493 = vdivps_avx512vl(auVar493,auVar492);
          auVar504 = vandps_avx512vl(auVar493,auVar1095);
          uVar427 = vcmpps_avx512vl(auVar1148,auVar504,1);
          auVar54._8_4_ = 0xbf800000;
          auVar54._0_8_ = 0xbf800000bf800000;
          auVar54._12_4_ = 0xbf800000;
          auVar496 = vblendmps_avx512vl(auVar504,auVar54);
          bVar28 = (byte)uVar427;
          auVar464._0_4_ =
               (uint)(bVar28 & 1) * auVar496._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar464._4_4_ = (uint)bVar11 * auVar496._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar464._8_4_ = (uint)bVar11 * auVar496._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar464._12_4_ = (uint)bVar11 * auVar496._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          uVar428 = vcmpps_avx512vl(auVar492,auVar462,1);
          auVar504 = vdivps_avx512vl(auVar464,auVar504);
          auVar465._0_4_ =
               (uint)(bVar28 & 1) * auVar504._0_4_ | !(bool)(bVar28 & 1) * auVar464._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar465._4_4_ = (uint)bVar11 * auVar504._4_4_ | !bVar11 * auVar464._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar465._8_4_ = (uint)bVar11 * auVar504._8_4_ | !bVar11 * auVar464._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar465._12_4_ = (uint)bVar11 * auVar504._12_4_ | !bVar11 * auVar464._12_4_;
          in_ZMM21 = ZEXT1664(auVar465);
          auVar504 = vmulps_avx512vl(auVar465,auVar465);
          auVar496 = vmulps_avx512vl(auVar504,auVar504);
          auVar497 = vfmadd213ps_avx512vl(auVar1201,auVar496,auVar1265);
          auVar497 = vfmadd213ps_avx512vl(auVar497,auVar496,auVar1328);
          auVar497 = vfmadd213ps_avx512vl(auVar497,auVar496,auVar1384);
          auVar498 = vfmadd213ps_avx512vl(auVar1438,auVar496,auVar1492);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar496,auVar1546);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar496,auVar1600);
          auVar496 = vfmadd213ps_avx512vl(auVar498,auVar496,auVar1148);
          auVar504 = vfmadd231ps_avx512vl(auVar496,auVar504,auVar497);
          auVar504 = vmulps_avx512vl(auVar504,auVar465);
          auVar496 = vaddps_avx512vl(auVar504,auVar1654);
          auVar466._0_4_ =
               (uint)(bVar28 & 1) * auVar496._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar504._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar466._4_4_ = (uint)bVar11 * auVar496._4_4_ | (uint)!bVar11 * auVar504._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar466._8_4_ = (uint)bVar11 * auVar496._8_4_ | (uint)!bVar11 * auVar504._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar466._12_4_ = (uint)bVar11 * auVar496._12_4_ | (uint)!bVar11 * auVar504._12_4_;
          auVar493 = vpternlogd_avx512vl(auVar466,auVar493,auVar933,0xf8);
          auVar504 = vaddps_avx512vl(auVar493,auVar463);
          bVar11 = (bool)((byte)uVar428 & 1);
          bVar14 = (bool)((byte)(uVar428 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar428 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar492 = vpternlogd_avx512vl(auVar492,auVar1708,auVar933,0xec);
          uVar45 = vcmpps_avx512vl(auVar462,auVar492,2);
          auVar492 = vorps_avx512vl(auVar516,auVar1761);
          auVar467._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar492._4_4_;
          auVar467._0_4_ = (uint)((byte)uVar46 & 1) * auVar492._0_4_;
          auVar467._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar492._8_4_;
          auVar467._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar492._12_4_;
          uVar47 = (ushort)uVar46 | (ushort)uVar45;
          auVar492 = vorps_avx512vl(auVar467,auVar1708);
          auVar516 = vmovdqa32_avx512vl(auVar467);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar13 = (bool)((byte)uVar426 & 1);
          auVar468._0_4_ =
               (uint)bVar13 * ((uint)bVar11 * auVar504._0_4_ | (uint)!bVar11 * auVar493._0_4_) |
               (uint)!bVar13 * ((uint)bVar12 * auVar516._0_4_ | (uint)!bVar12 * auVar492._0_4_);
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar468._4_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar504._4_4_ | (uint)!bVar14 * auVar493._4_4_) |
               (uint)!bVar11 * ((uint)bVar15 * auVar516._4_4_ | (uint)!bVar15 * auVar492._4_4_);
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar468._8_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar504._8_4_ | (uint)!bVar16 * auVar493._8_4_) |
               (uint)!bVar11 * ((uint)bVar17 * auVar516._8_4_ | (uint)!bVar17 * auVar492._8_4_);
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar468._12_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar504._12_4_ | (uint)!bVar18 * auVar493._12_4_) |
               (uint)!bVar11 * ((uint)bVar19 * auVar516._12_4_ | (uint)!bVar19 * auVar492._12_4_);
          *(undefined1 (*) [16])((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar468;
          lVar425 = lVar425 + 4;
          iVar421 = iVar421 + -1;
        } while (iVar421 != 0);
        return;
      }
      if (bw == 1) {
        auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
        auVar592 = auVar730._0_32_;
        if ((int)uVar424 < 0x10) {
          uVar422 = 0;
        }
        else {
          auVar1755 = ZEXT864(0);
          uVar46 = vcmpps_avx512f(auVar730,auVar1755,1);
          auVar712 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar713 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar719._0_4_ = (uint)bVar11 * auVar713._0_4_ | (uint)!bVar11 * auVar712._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar719._4_4_ = (uint)bVar11 * auVar713._4_4_ | (uint)!bVar11 * auVar712._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar719._8_4_ = (uint)bVar11 * auVar713._8_4_ | (uint)!bVar11 * auVar712._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar719._12_4_ = (uint)bVar11 * auVar713._12_4_ | (uint)!bVar11 * auVar712._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar719._16_4_ = (uint)bVar11 * auVar713._16_4_ | (uint)!bVar11 * auVar712._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar719._20_4_ = (uint)bVar11 * auVar713._20_4_ | (uint)!bVar11 * auVar712._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar719._24_4_ = (uint)bVar11 * auVar713._24_4_ | (uint)!bVar11 * auVar712._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar719._28_4_ = (uint)bVar11 * auVar713._28_4_ | (uint)!bVar11 * auVar712._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          auVar719._32_4_ = (uint)bVar11 * auVar713._32_4_ | (uint)!bVar11 * auVar712._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar719._36_4_ = (uint)bVar11 * auVar713._36_4_ | (uint)!bVar11 * auVar712._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar719._40_4_ = (uint)bVar11 * auVar713._40_4_ | (uint)!bVar11 * auVar712._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar719._44_4_ = (uint)bVar11 * auVar713._44_4_ | (uint)!bVar11 * auVar712._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar719._48_4_ = (uint)bVar11 * auVar713._48_4_ | (uint)!bVar11 * auVar712._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar719._52_4_ = (uint)bVar11 * auVar713._52_4_ | (uint)!bVar11 * auVar712._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar719._56_4_ = (uint)bVar11 * auVar713._56_4_ | (uint)!bVar11 * auVar712._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar719._60_4_ = (uint)bVar11 * auVar713._60_4_ | (uint)!bVar11 * auVar712._60_4_;
          auVar712 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar718._8_4_ = 0x80000000;
          auVar718._0_8_ = 0x8000000080000000;
          auVar718._12_4_ = 0x80000000;
          auVar718._16_4_ = 0x80000000;
          auVar718._20_4_ = 0x80000000;
          auVar718._24_4_ = 0x80000000;
          auVar718._28_4_ = 0x80000000;
          auVar718._32_4_ = 0x80000000;
          auVar718._36_4_ = 0x80000000;
          auVar718._40_4_ = 0x80000000;
          auVar718._44_4_ = 0x80000000;
          auVar718._48_4_ = 0x80000000;
          auVar718._52_4_ = 0x80000000;
          auVar718._56_4_ = 0x80000000;
          auVar718._60_4_ = 0x80000000;
          auVar712 = vpternlogd_avx512f(auVar712,auVar730,auVar718,0xf8);
          iVar421 = 0xf;
          auVar713 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          uVar46 = vcmpps_avx512f(auVar730,auVar1755,4);
          auVar726 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          do {
            auVar732 = *(undefined1 (*) [64])ptr;
            auVar845 = vdivps_avx512f(auVar730,auVar732);
            auVar729 = vandps_avx512dq(auVar845,auVar714);
            uVar426 = vcmpps_avx512f(auVar715,auVar729,1);
            auVar333._8_4_ = 0xbf800000;
            auVar333._0_8_ = 0xbf800000bf800000;
            auVar333._12_4_ = 0xbf800000;
            auVar333._16_4_ = 0xbf800000;
            auVar333._20_4_ = 0xbf800000;
            auVar333._24_4_ = 0xbf800000;
            auVar333._28_4_ = 0xbf800000;
            auVar333._32_4_ = 0xbf800000;
            auVar333._36_4_ = 0xbf800000;
            auVar333._40_4_ = 0xbf800000;
            auVar333._44_4_ = 0xbf800000;
            auVar333._48_4_ = 0xbf800000;
            auVar333._52_4_ = 0xbf800000;
            auVar333._56_4_ = 0xbf800000;
            auVar333._60_4_ = 0xbf800000;
            auVar727 = vblendmps_avx512f(auVar729,auVar333);
            bVar11 = (bool)((byte)uVar426 & 1);
            auVar754._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * in_ZMM20._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar754._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * in_ZMM20._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar754._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * in_ZMM20._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar754._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * in_ZMM20._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar754._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * in_ZMM20._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar754._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * in_ZMM20._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar754._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * in_ZMM20._24_4_;
            bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
            auVar754._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * in_ZMM20._28_4_;
            bVar28 = (byte)(uVar426 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar754._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * in_ZMM20._32_4_;
            bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
            auVar754._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * in_ZMM20._36_4_;
            bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
            auVar754._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * in_ZMM20._40_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
            auVar754._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * in_ZMM20._44_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
            auVar754._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * in_ZMM20._48_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
            auVar754._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * in_ZMM20._52_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
            auVar754._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * in_ZMM20._56_4_;
            bVar11 = SUB81(uVar426 >> 0xf,0);
            auVar754._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * in_ZMM20._60_4_;
            auVar729 = vmaxps_avx512f(auVar729,auVar715);
            auVar729 = vdivps_avx512f(auVar754,auVar729);
            in_ZMM20 = vmulps_avx512f(auVar729,auVar729);
            uVar427 = vcmpps_avx512f(auVar732,auVar1755,4);
            in_ZMM21 = vmulps_avx512f(in_ZMM20,in_ZMM20);
            auVar727 = vfmadd213ps_avx512f(auVar716,in_ZMM21,auVar717);
            auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM21,auVar718);
            auVar728 = vfmadd213ps_avx512f(auVar721,in_ZMM21,auVar722);
            auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM21,auVar723);
            auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM21,auVar720);
            auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM21,auVar724);
            auVar728 = vfmadd213ps_avx512f(auVar728,in_ZMM21,auVar715);
            auVar727 = vfmadd231ps_avx512f(auVar728,in_ZMM20,auVar727);
            uVar428 = vcmpps_avx512f(auVar732,auVar1755,1);
            auVar729 = vmulps_avx512f(auVar727,auVar729);
            auVar727 = vaddps_avx512f(auVar729,auVar725);
            bVar11 = (bool)((byte)uVar426 & 1);
            auVar755._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar729._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar755._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar729._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar755._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar729._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar755._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar729._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar755._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar729._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar755._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar729._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar755._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar729._24_4_;
            bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
            auVar755._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar729._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar755._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar729._32_4_;
            bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
            auVar755._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar729._36_4_;
            bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
            auVar755._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar729._40_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
            auVar755._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar729._44_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
            auVar755._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar729._48_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
            auVar755._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar729._52_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
            auVar755._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar729._56_4_;
            bVar11 = SUB81(uVar426 >> 0xf,0);
            auVar755._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar729._60_4_;
            auVar732 = vpternlogd_avx512f(auVar732,auVar713,auVar726,0xea);
            auVar729 = vpternlogd_avx512f(auVar755,auVar845,auVar713,0xf8);
            uVar426 = vcmpps_avx512f(auVar732,auVar1755,1);
            auVar732 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
            auVar727 = vaddps_avx512f(auVar729,auVar719);
            bVar11 = (bool)((byte)uVar428 & 1);
            auVar756._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar729._0_4_;
            bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
            auVar756._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar729._4_4_;
            bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
            auVar756._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar729._8_4_;
            bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
            auVar756._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar729._12_4_;
            bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
            auVar756._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar729._16_4_;
            bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
            auVar756._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar729._20_4_;
            bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
            auVar756._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar729._24_4_;
            bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
            auVar756._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar729._28_4_;
            bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
            auVar756._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar729._32_4_;
            bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
            auVar756._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar729._36_4_;
            bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
            auVar756._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar729._40_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
            auVar756._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar729._44_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
            auVar756._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar729._48_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
            auVar756._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar729._52_4_;
            bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
            auVar756._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar729._56_4_;
            bVar11 = SUB81(uVar428 >> 0xf,0);
            auVar756._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar729._60_4_;
            auVar729 = vblendmps_avx512f(auVar712,auVar756);
            bVar11 = (bool)((byte)uVar427 & 1);
            bVar13 = (bool)((byte)(uVar427 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar427 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar427 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar427 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar427 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar427 >> 6) & 1);
            bVar19 = (bool)((byte)(uVar427 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar427 >> 8) & 1);
            bVar21 = (bool)((byte)(uVar427 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar427 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar427 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar427 >> 0xc) & 1);
            bVar25 = (bool)((byte)(uVar427 >> 0xd) & 1);
            bVar26 = (bool)((byte)(uVar427 >> 0xe) & 1);
            bVar27 = SUB81(uVar427 >> 0xf,0);
            bVar12 = (bool)((byte)uVar46 & 1);
            auVar592._0_4_ =
                 (uint)bVar12 * ((uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_) |
                 (uint)!bVar12 * (uint)((byte)uVar426 & 1) * auVar732._0_4_;
            bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
            auVar592._4_4_ =
                 (uint)bVar11 * ((uint)bVar13 * auVar729._4_4_ | (uint)!bVar13 * auVar845._4_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 1) & 1) * auVar732._4_4_;
            bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
            auVar592._8_4_ =
                 (uint)bVar11 * ((uint)bVar14 * auVar729._8_4_ | (uint)!bVar14 * auVar845._8_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 2) & 1) * auVar732._8_4_;
            bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
            auVar592._12_4_ =
                 (uint)bVar11 * ((uint)bVar15 * auVar729._12_4_ | (uint)!bVar15 * auVar845._12_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 3) & 1) * auVar732._12_4_;
            bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
            auVar592._16_4_ =
                 (uint)bVar11 * ((uint)bVar16 * auVar729._16_4_ | (uint)!bVar16 * auVar845._16_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 4) & 1) * auVar732._16_4_;
            bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
            auVar592._20_4_ =
                 (uint)bVar11 * ((uint)bVar17 * auVar729._20_4_ | (uint)!bVar17 * auVar845._20_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 5) & 1) * auVar732._20_4_;
            bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
            auVar592._24_4_ =
                 (uint)bVar11 * ((uint)bVar18 * auVar729._24_4_ | (uint)!bVar18 * auVar845._24_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 6) & 1) * auVar732._24_4_;
            bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
            auVar592._28_4_ =
                 (uint)bVar11 * ((uint)bVar19 * auVar729._28_4_ | (uint)!bVar19 * auVar845._28_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 7) & 1) * auVar732._28_4_;
            bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
            auVar757._32_4_ =
                 (uint)bVar11 * ((uint)bVar20 * auVar729._32_4_ | (uint)!bVar20 * auVar845._32_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 8) & 1) * auVar732._32_4_;
            auVar757._0_32_ = auVar592;
            bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
            auVar757._36_4_ =
                 (uint)bVar11 * ((uint)bVar21 * auVar729._36_4_ | (uint)!bVar21 * auVar845._36_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 9) & 1) * auVar732._36_4_;
            bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
            auVar757._40_4_ =
                 (uint)bVar11 * ((uint)bVar22 * auVar729._40_4_ | (uint)!bVar22 * auVar845._40_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 10) & 1) * auVar732._40_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
            auVar757._44_4_ =
                 (uint)bVar11 * ((uint)bVar23 * auVar729._44_4_ | (uint)!bVar23 * auVar845._44_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 0xb) & 1) * auVar732._44_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
            auVar757._48_4_ =
                 (uint)bVar11 * ((uint)bVar24 * auVar729._48_4_ | (uint)!bVar24 * auVar845._48_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 0xc) & 1) * auVar732._48_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
            auVar757._52_4_ =
                 (uint)bVar11 * ((uint)bVar25 * auVar729._52_4_ | (uint)!bVar25 * auVar845._52_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 0xd) & 1) * auVar732._52_4_;
            bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
            auVar757._56_4_ =
                 (uint)bVar11 * ((uint)bVar26 * auVar729._56_4_ | (uint)!bVar26 * auVar845._56_4_) |
                 (uint)!bVar11 * (uint)((byte)(uVar426 >> 0xe) & 1) * auVar732._56_4_;
            bVar11 = SUB81(uVar46 >> 0xf,0);
            auVar757._60_4_ =
                 (uint)bVar11 * ((uint)bVar27 * auVar729._60_4_ | (uint)!bVar27 * auVar845._60_4_) |
                 (uint)!bVar11 * (uint)(byte)(uVar426 >> 0xf) * auVar732._60_4_;
            *(undefined1 (*) [64])outptr = auVar757;
            ptr = (float *)((long)ptr + 0x40);
            outptr = (float *)((long)outptr + 0x40);
            iVar421 = iVar421 + 0x10;
          } while (iVar421 < (int)uVar424);
          uVar422 = uVar424 & 0x7ffffff0;
          auVar730 = ZEXT464((uint)*ptr1);
        }
        auVar559._0_4_ = auVar730._0_4_;
        if ((int)(uVar422 | 7) < (int)uVar424) {
          auVar559._4_4_ = auVar559._0_4_;
          auVar559._8_4_ = auVar559._0_4_;
          auVar559._12_4_ = auVar559._0_4_;
          auVar559._16_4_ = auVar559._0_4_;
          auVar559._20_4_ = auVar559._0_4_;
          auVar559._24_4_ = auVar559._0_4_;
          auVar559._28_4_ = auVar559._0_4_;
          auVar462 = ZEXT816(0) << 0x40;
          auVar176._8_4_ = 0x80000000;
          auVar176._0_8_ = 0x8000000080000000;
          auVar176._12_4_ = 0x80000000;
          auVar176._16_4_ = 0x80000000;
          auVar176._20_4_ = 0x80000000;
          auVar176._24_4_ = 0x80000000;
          auVar176._28_4_ = 0x80000000;
          vandps_avx512vl(auVar559,auVar176);
          uVar46 = vcmpps_avx512vl(auVar559,ZEXT1632(auVar462),4);
          uVar426 = vcmpps_avx512vl(auVar559,ZEXT1632(auVar462),1);
          auVar671 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar663._0_4_ = (uint)bVar11 * auVar671._0_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar663._4_4_ = (uint)bVar11 * auVar671._4_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar663._8_4_ = (uint)bVar11 * auVar671._8_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar663._12_4_ = (uint)bVar11 * auVar671._12_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar663._16_4_ = (uint)bVar11 * auVar671._16_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar663._20_4_ = (uint)bVar11 * auVar671._20_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar663._24_4_ = (uint)bVar11 * auVar671._24_4_ | (uint)!bVar11 * 0x40490fdb;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar663._28_4_ = (uint)bVar11 * auVar671._28_4_ | (uint)!bVar11 * 0x40490fdb;
          auVar177._8_4_ = 0x3fc90fdb;
          auVar177._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar177._12_4_ = 0x3fc90fdb;
          auVar177._16_4_ = 0x3fc90fdb;
          auVar177._20_4_ = 0x3fc90fdb;
          auVar177._24_4_ = 0x3fc90fdb;
          auVar177._28_4_ = 0x3fc90fdb;
          auVar671 = vorps_avx512vl(auVar592,auVar177);
          auVar664._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar671._4_4_;
          auVar664._0_4_ = (uint)((byte)uVar46 & 1) * auVar671._0_4_;
          auVar664._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar671._8_4_;
          auVar664._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar671._12_4_;
          auVar664._16_4_ = (uint)((byte)(uVar46 >> 4) & 1) * auVar671._16_4_;
          auVar664._20_4_ = (uint)((byte)(uVar46 >> 5) & 1) * auVar671._20_4_;
          auVar664._24_4_ = (uint)((byte)(uVar46 >> 6) & 1) * auVar671._24_4_;
          auVar664._28_4_ = (uint)(byte)(uVar46 >> 7) * auVar671._28_4_;
          auVar1188._8_4_ = 0x80000000;
          auVar1188._0_8_ = 0x8000000080000000;
          auVar1188._12_4_ = 0x80000000;
          auVar1188._16_4_ = 0x80000000;
          auVar1188._20_4_ = 0x80000000;
          auVar1188._24_4_ = 0x80000000;
          auVar1188._28_4_ = 0x80000000;
          auVar1252._8_4_ = 0x7fffffff;
          auVar1252._0_8_ = 0x7fffffff7fffffff;
          auVar1252._12_4_ = 0x7fffffff;
          auVar1252._16_4_ = 0x7fffffff;
          auVar1252._20_4_ = 0x7fffffff;
          auVar1252._24_4_ = 0x7fffffff;
          auVar1252._28_4_ = 0x7fffffff;
          auVar1311._8_4_ = 0x3f800000;
          auVar1311._0_8_ = 0x3f8000003f800000;
          auVar1311._12_4_ = 0x3f800000;
          auVar1311._16_4_ = 0x3f800000;
          auVar1311._20_4_ = 0x3f800000;
          auVar1311._24_4_ = 0x3f800000;
          auVar1311._28_4_ = 0x3f800000;
          auVar1367._8_4_ = 0xbc83a25c;
          auVar1367._0_8_ = 0xbc83a25cbc83a25c;
          auVar1367._12_4_ = 0xbc83a25c;
          auVar1367._16_4_ = 0xbc83a25c;
          auVar1367._20_4_ = 0xbc83a25c;
          auVar1367._24_4_ = 0xbc83a25c;
          auVar1367._28_4_ = 0xbc83a25c;
          auVar1424._8_4_ = 0xbd99b01e;
          auVar1424._0_8_ = 0xbd99b01ebd99b01e;
          auVar1424._12_4_ = 0xbd99b01e;
          auVar1424._16_4_ = 0xbd99b01e;
          auVar1424._20_4_ = 0xbd99b01e;
          auVar1424._24_4_ = 0xbd99b01e;
          auVar1424._28_4_ = 0xbd99b01e;
          auVar1478._8_4_ = 0xbe117200;
          auVar1478._0_8_ = 0xbe117200be117200;
          auVar1478._12_4_ = 0xbe117200;
          auVar1478._16_4_ = 0xbe117200;
          auVar1478._20_4_ = 0xbe117200;
          auVar1478._24_4_ = 0xbe117200;
          auVar1478._28_4_ = 0xbe117200;
          auVar1532._8_4_ = 0xbeaaaa53;
          auVar1532._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1532._12_4_ = 0xbeaaaa53;
          auVar1532._16_4_ = 0xbeaaaa53;
          auVar1532._20_4_ = 0xbeaaaa53;
          auVar1532._24_4_ = 0xbeaaaa53;
          auVar1532._28_4_ = 0xbeaaaa53;
          auVar1586._8_4_ = 0x3b3ac537;
          auVar1586._0_8_ = 0x3b3ac5373b3ac537;
          auVar1586._12_4_ = 0x3b3ac537;
          auVar1586._16_4_ = 0x3b3ac537;
          auVar1586._20_4_ = 0x3b3ac537;
          auVar1586._24_4_ = 0x3b3ac537;
          auVar1586._28_4_ = 0x3b3ac537;
          auVar1640._8_4_ = 0x3d2edd4e;
          auVar1640._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1640._12_4_ = 0x3d2edd4e;
          auVar1640._16_4_ = 0x3d2edd4e;
          auVar1640._20_4_ = 0x3d2edd4e;
          auVar1640._24_4_ = 0x3d2edd4e;
          auVar1640._28_4_ = 0x3d2edd4e;
          auVar1694._8_4_ = 0x3dd9ed24;
          auVar1694._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1694._12_4_ = 0x3dd9ed24;
          auVar1694._16_4_ = 0x3dd9ed24;
          auVar1694._20_4_ = 0x3dd9ed24;
          auVar1694._24_4_ = 0x3dd9ed24;
          auVar1694._28_4_ = 0x3dd9ed24;
          auVar1745._8_4_ = 0x3e4cb974;
          auVar1745._0_8_ = 0x3e4cb9743e4cb974;
          auVar1745._12_4_ = 0x3e4cb974;
          auVar1745._16_4_ = 0x3e4cb974;
          auVar1745._20_4_ = 0x3e4cb974;
          auVar1745._24_4_ = 0x3e4cb974;
          auVar1745._28_4_ = 0x3e4cb974;
          auVar1795._8_4_ = 0x3fc90fdb;
          auVar1795._0_8_ = 0x3fc90fdb3fc90fdb;
          auVar1795._12_4_ = 0x3fc90fdb;
          auVar1795._16_4_ = 0x3fc90fdb;
          auVar1795._20_4_ = 0x3fc90fdb;
          auVar1795._24_4_ = 0x3fc90fdb;
          auVar1795._28_4_ = 0x3fc90fdb;
          auVar671 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
          auVar672 = vorps_avx512vl(auVar664,auVar671);
          uVar872 = uVar422;
          do {
            auVar675 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
            auVar684 = vdivps_avx512vl(auVar559,auVar675);
            vandps_avx512vl(auVar684,auVar1252);
            uVar426 = vcmpps_avx512vl(auVar1311,auVar684,1);
            auVar178._8_4_ = 0xbf800000;
            auVar178._0_8_ = 0xbf800000bf800000;
            auVar178._12_4_ = 0xbf800000;
            auVar178._16_4_ = 0xbf800000;
            auVar178._20_4_ = 0xbf800000;
            auVar178._24_4_ = 0xbf800000;
            auVar178._28_4_ = 0xbf800000;
            auVar676 = vblendmps_avx512vl(auVar684,auVar178);
            bVar28 = (byte)uVar426;
            auVar665._0_4_ =
                 (uint)(bVar28 & 1) * auVar676._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar665._4_4_ = (uint)bVar11 * auVar676._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar665._8_4_ = (uint)bVar11 * auVar676._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar665._12_4_ = (uint)bVar11 * auVar676._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar665._16_4_ = (uint)bVar11 * auVar676._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar665._20_4_ = (uint)bVar11 * auVar676._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar665._24_4_ = (uint)bVar11 * auVar676._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar665._28_4_ = (uint)bVar11 * auVar676._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
            auVar676 = vdivps_avx512vl(auVar665,auVar684);
            auVar666._0_4_ =
                 (uint)(bVar28 & 1) * auVar676._0_4_ | !(bool)(bVar28 & 1) * auVar665._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar666._4_4_ = (uint)bVar11 * auVar676._4_4_ | !bVar11 * auVar665._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar666._8_4_ = (uint)bVar11 * auVar676._8_4_ | !bVar11 * auVar665._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar666._12_4_ = (uint)bVar11 * auVar676._12_4_ | !bVar11 * auVar665._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar666._16_4_ = (uint)bVar11 * auVar676._16_4_ | !bVar11 * auVar665._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar666._20_4_ = (uint)bVar11 * auVar676._20_4_ | !bVar11 * auVar665._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar666._24_4_ = (uint)bVar11 * auVar676._24_4_ | !bVar11 * auVar665._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar666._28_4_ = (uint)bVar11 * auVar676._28_4_ | !bVar11 * auVar665._28_4_;
            in_ZMM21 = ZEXT3264(auVar666);
            auVar676 = vmulps_avx512vl(auVar666,auVar666);
            auVar682 = ZEXT1632(auVar462);
            uVar427 = vcmpps_avx512vl(auVar675,auVar682,4);
            uVar427 = uVar46 & uVar427;
            auVar677 = vmulps_avx512vl(auVar676,auVar676);
            auVar680 = vfmadd213ps_avx512vl(auVar1367,auVar677,auVar1424);
            auVar680 = vfmadd213ps_avx512vl(auVar680,auVar677,auVar1478);
            auVar681 = vfmadd213ps_avx512vl(auVar1586,auVar677,auVar1640);
            auVar681 = vfmadd213ps_avx512vl(auVar681,auVar677,auVar1694);
            auVar680 = vfmadd213ps_avx512vl(auVar680,auVar677,auVar1532);
            auVar681 = vfmadd213ps_avx512vl(auVar681,auVar677,auVar1745);
            auVar677 = vfmadd213ps_avx512vl(auVar681,auVar677,auVar1311);
            auVar676 = vfmadd231ps_avx512vl(auVar677,auVar676,auVar680);
            uVar428 = vcmpps_avx512vl(auVar675,auVar682,1);
            auVar676 = vmulps_avx512vl(auVar676,auVar666);
            auVar677 = vaddps_avx512vl(auVar676,auVar1795);
            auVar667._0_4_ =
                 (uint)(bVar28 & 1) * auVar677._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar676._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar667._4_4_ = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * auVar676._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar667._8_4_ = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * auVar676._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar667._12_4_ = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * auVar676._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar667._16_4_ = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * auVar676._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar667._20_4_ = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * auVar676._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar667._24_4_ = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * auVar676._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar667._28_4_ = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * auVar676._28_4_;
            auVar675 = vpternlogd_avx512vl(auVar675,auVar671,auVar1188,0xec);
            auVar684 = vpternlogd_avx512vl(auVar667,auVar684,auVar1188,0xf8);
            uVar45 = vcmpps_avx512vl(auVar682,auVar675,2);
            bVar28 = (byte)uVar46 | (byte)uVar45;
            auVar676 = vpblendmd_avx512vl(auVar672,auVar664);
            bVar13 = (bool)(bVar28 >> 1 & 1);
            bVar16 = (bool)(bVar28 >> 2 & 1);
            bVar19 = (bool)(bVar28 >> 3 & 1);
            bVar22 = (bool)(bVar28 >> 4 & 1);
            bVar25 = (bool)(bVar28 >> 5 & 1);
            bVar29 = (bool)(bVar28 >> 6 & 1);
            auVar677 = vaddps_avx512vl(auVar684,auVar663);
            bVar11 = (bool)((byte)uVar428 & 1);
            bVar14 = (bool)((byte)(uVar428 >> 1) & 1);
            bVar17 = (bool)((byte)(uVar428 >> 2) & 1);
            bVar20 = (bool)((byte)(uVar428 >> 3) & 1);
            bVar23 = (bool)((byte)(uVar428 >> 4) & 1);
            bVar26 = (bool)((byte)(uVar428 >> 5) & 1);
            bVar30 = (bool)((byte)(uVar428 >> 6) & 1);
            bVar32 = SUB81(uVar428 >> 7,0);
            bVar12 = (bool)((byte)uVar427 & 1);
            bVar15 = (bool)((byte)(uVar427 >> 1) & 1);
            bVar18 = (bool)((byte)(uVar427 >> 2) & 1);
            bVar21 = (bool)((byte)(uVar427 >> 3) & 1);
            bVar24 = (bool)((byte)(uVar427 >> 4) & 1);
            bVar27 = (bool)((byte)(uVar427 >> 5) & 1);
            bVar31 = (bool)((byte)(uVar427 >> 6) & 1);
            bVar33 = SUB81(uVar427 >> 7,0);
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            *(uint *)*(undefined1 (*) [64])outptr =
                 (uint)bVar12 * ((uint)bVar11 * auVar677._0_4_ | (uint)!bVar11 * auVar684._0_4_) |
                 (uint)!bVar12 *
                 ((uint)(bVar28 & 1) * auVar676._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar675._0_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 4) =
                 (uint)bVar15 * ((uint)bVar14 * auVar677._4_4_ | (uint)!bVar14 * auVar684._4_4_) |
                 (uint)!bVar15 * ((uint)bVar13 * auVar676._4_4_ | (uint)!bVar13 * auVar675._4_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 8) =
                 (uint)bVar18 * ((uint)bVar17 * auVar677._8_4_ | (uint)!bVar17 * auVar684._8_4_) |
                 (uint)!bVar18 * ((uint)bVar16 * auVar676._8_4_ | (uint)!bVar16 * auVar675._8_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0xc) =
                 (uint)bVar21 * ((uint)bVar20 * auVar677._12_4_ | (uint)!bVar20 * auVar684._12_4_) |
                 (uint)!bVar21 * ((uint)bVar19 * auVar676._12_4_ | (uint)!bVar19 * auVar675._12_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x10) =
                 (uint)bVar24 * ((uint)bVar23 * auVar677._16_4_ | (uint)!bVar23 * auVar684._16_4_) |
                 (uint)!bVar24 * ((uint)bVar22 * auVar676._16_4_ | (uint)!bVar22 * auVar675._16_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x14) =
                 (uint)bVar27 * ((uint)bVar26 * auVar677._20_4_ | (uint)!bVar26 * auVar684._20_4_) |
                 (uint)!bVar27 * ((uint)bVar25 * auVar676._20_4_ | (uint)!bVar25 * auVar675._20_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x18) =
                 (uint)bVar31 * ((uint)bVar30 * auVar677._24_4_ | (uint)!bVar30 * auVar684._24_4_) |
                 (uint)!bVar31 * ((uint)bVar29 * auVar676._24_4_ | (uint)!bVar29 * auVar675._24_4_);
            *(uint *)((long)*(undefined1 (*) [64])outptr + 0x1c) =
                 (uint)bVar33 * ((uint)bVar32 * auVar677._28_4_ | (uint)!bVar32 * auVar684._28_4_) |
                 (uint)!bVar33 *
                 ((uint)(bVar28 >> 7) * auVar676._28_4_ |
                 (uint)!(bool)(bVar28 >> 7) * auVar675._28_4_);
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            uVar422 = uVar872 + 8;
            iVar421 = uVar872 + 0xf;
            uVar872 = uVar422;
          } while (iVar421 < (int)uVar424);
          auVar559._0_4_ = *ptr1;
        }
        if ((int)uVar424 <= (int)(uVar422 | 3)) {
          return;
        }
        auVar883._4_4_ = auVar559._0_4_;
        auVar883._0_4_ = auVar559._0_4_;
        auVar883._8_4_ = auVar559._0_4_;
        auVar883._12_4_ = auVar559._0_4_;
        auVar493 = ZEXT816(0) << 0x40;
        uVar46 = vcmpps_avx512vl(auVar883,auVar493,4);
        auVar462._8_4_ = 0x80000000;
        auVar462._0_8_ = 0x8000000080000000;
        auVar462._12_4_ = 0x80000000;
        auVar462 = vandps_avx512vl(auVar883,auVar462);
        uVar426 = vcmpps_avx512vl(auVar883,auVar493,1);
        auVar492 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar469._0_4_ = (uint)bVar11 * auVar492._0_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar469._4_4_ = (uint)bVar11 * auVar492._4_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar469._8_4_ = (uint)bVar11 * auVar492._8_4_ | (uint)!bVar11 * 0x40490fdb;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar469._12_4_ = (uint)bVar11 * auVar492._12_4_ | (uint)!bVar11 * 0x40490fdb;
        auVar55._8_4_ = 0x3fc90fdb;
        auVar55._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar55._12_4_ = 0x3fc90fdb;
        auVar462 = vorps_avx512vl(auVar462,auVar55);
        auVar470._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar462._4_4_;
        auVar470._0_4_ = (uint)((byte)uVar46 & 1) * auVar462._0_4_;
        auVar470._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar462._8_4_;
        auVar470._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar462._12_4_;
        auVar1149._8_4_ = 0x80000000;
        auVar1149._0_8_ = 0x8000000080000000;
        auVar1149._12_4_ = 0x80000000;
        auVar1202._8_4_ = 0x7fffffff;
        auVar1202._0_8_ = 0x7fffffff7fffffff;
        auVar1202._12_4_ = 0x7fffffff;
        auVar1266._8_4_ = 0x3f800000;
        auVar1266._0_8_ = 0x3f8000003f800000;
        auVar1266._12_4_ = 0x3f800000;
        auVar1329._8_4_ = 0xbc83a25c;
        auVar1329._0_8_ = 0xbc83a25cbc83a25c;
        auVar1329._12_4_ = 0xbc83a25c;
        auVar1385._8_4_ = 0xbd99b01e;
        auVar1385._0_8_ = 0xbd99b01ebd99b01e;
        auVar1385._12_4_ = 0xbd99b01e;
        auVar1439._8_4_ = 0xbe117200;
        auVar1439._0_8_ = 0xbe117200be117200;
        auVar1439._12_4_ = 0xbe117200;
        auVar1493._8_4_ = 0xbeaaaa53;
        auVar1493._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1493._12_4_ = 0xbeaaaa53;
        auVar1547._8_4_ = 0x3b3ac537;
        auVar1547._0_8_ = 0x3b3ac5373b3ac537;
        auVar1547._12_4_ = 0x3b3ac537;
        auVar1601._8_4_ = 0x3d2edd4e;
        auVar1601._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1601._12_4_ = 0x3d2edd4e;
        auVar1655._8_4_ = 0x3dd9ed24;
        auVar1655._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1655._12_4_ = 0x3dd9ed24;
        auVar1709._8_4_ = 0x3e4cb974;
        auVar1709._0_8_ = 0x3e4cb9743e4cb974;
        auVar1709._12_4_ = 0x3e4cb974;
        auVar1762._8_4_ = 0x3fc90fdb;
        auVar1762._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar1762._12_4_ = 0x3fc90fdb;
        lVar425 = 0;
        auVar462 = vbroadcastss_avx512vl(ZEXT416(0x40490fdb));
        auVar492 = vorps_avx512vl(auVar470,auVar462);
        do {
          auVar516 = *(undefined1 (*) [16])(*(undefined1 (*) [64])ptr + lVar425 * 4);
          uVar426 = vcmpps_avx512vl(auVar516,auVar493,4);
          uVar426 = uVar46 & uVar426;
          auVar504 = vdivps_avx512vl(auVar883,auVar516);
          auVar496 = vandps_avx512vl(auVar504,auVar1202);
          uVar427 = vcmpps_avx512vl(auVar1266,auVar496,1);
          auVar56._8_4_ = 0xbf800000;
          auVar56._0_8_ = 0xbf800000bf800000;
          auVar56._12_4_ = 0xbf800000;
          auVar497 = vblendmps_avx512vl(auVar496,auVar56);
          bVar28 = (byte)uVar427;
          auVar471._0_4_ =
               (uint)(bVar28 & 1) * auVar497._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar471._4_4_ = (uint)bVar11 * auVar497._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar471._8_4_ = (uint)bVar11 * auVar497._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar471._12_4_ = (uint)bVar11 * auVar497._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          uVar428 = vcmpps_avx512vl(auVar516,auVar493,1);
          auVar496 = vdivps_avx512vl(auVar471,auVar496);
          auVar472._0_4_ =
               (uint)(bVar28 & 1) * auVar496._0_4_ | !(bool)(bVar28 & 1) * auVar471._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar472._4_4_ = (uint)bVar11 * auVar496._4_4_ | !bVar11 * auVar471._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar472._8_4_ = (uint)bVar11 * auVar496._8_4_ | !bVar11 * auVar471._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar472._12_4_ = (uint)bVar11 * auVar496._12_4_ | !bVar11 * auVar471._12_4_;
          in_ZMM21 = ZEXT1664(auVar472);
          auVar496 = vmulps_avx512vl(auVar472,auVar472);
          auVar497 = vmulps_avx512vl(auVar496,auVar496);
          auVar498 = vfmadd213ps_avx512vl(auVar1329,auVar497,auVar1385);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar497,auVar1439);
          auVar498 = vfmadd213ps_avx512vl(auVar498,auVar497,auVar1493);
          auVar501 = vfmadd213ps_avx512vl(auVar1547,auVar497,auVar1601);
          auVar501 = vfmadd213ps_avx512vl(auVar501,auVar497,auVar1655);
          auVar501 = vfmadd213ps_avx512vl(auVar501,auVar497,auVar1709);
          auVar497 = vfmadd213ps_avx512vl(auVar501,auVar497,auVar1266);
          auVar496 = vfmadd231ps_avx512vl(auVar497,auVar496,auVar498);
          auVar496 = vmulps_avx512vl(auVar496,auVar472);
          auVar497 = vaddps_avx512vl(auVar496,auVar1762);
          auVar473._0_4_ =
               (uint)(bVar28 & 1) * auVar497._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar496._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar473._4_4_ = (uint)bVar11 * auVar497._4_4_ | (uint)!bVar11 * auVar496._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar473._8_4_ = (uint)bVar11 * auVar497._8_4_ | (uint)!bVar11 * auVar496._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar473._12_4_ = (uint)bVar11 * auVar497._12_4_ | (uint)!bVar11 * auVar496._12_4_;
          auVar504 = vpternlogd_avx512vl(auVar473,auVar504,auVar1149,0xf8);
          auVar496 = vaddps_avx512vl(auVar504,auVar469);
          bVar11 = (bool)((byte)uVar428 & 1);
          bVar14 = (bool)((byte)(uVar428 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar428 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar516 = vpternlogd_avx512vl(auVar516,auVar462,auVar1149,0xec);
          uVar45 = vcmpps_avx512vl(auVar493,auVar516,2);
          uVar47 = (ushort)uVar46 | (ushort)uVar45;
          auVar497 = vpblendmd_avx512vl(auVar492,auVar470);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar13 = (bool)((byte)uVar426 & 1);
          bVar16 = (bool)((byte)(uVar426 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar426 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar426 >> 3) & 1);
          pfVar9 = (float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4);
          *pfVar9 = (float)((uint)bVar13 *
                            ((uint)bVar11 * auVar496._0_4_ | (uint)!bVar11 * auVar504._0_4_) |
                           (uint)!bVar13 *
                           ((uint)bVar12 * auVar497._0_4_ | (uint)!bVar12 * auVar516._0_4_));
          pfVar9[1] = (float)((uint)bVar16 *
                              ((uint)bVar14 * auVar496._4_4_ | (uint)!bVar14 * auVar504._4_4_) |
                             (uint)!bVar16 *
                             ((uint)bVar15 * auVar497._4_4_ | (uint)!bVar15 * auVar516._4_4_));
          pfVar9[2] = (float)((uint)bVar19 *
                              ((uint)bVar17 * auVar496._8_4_ | (uint)!bVar17 * auVar504._8_4_) |
                             (uint)!bVar19 *
                             ((uint)bVar18 * auVar497._8_4_ | (uint)!bVar18 * auVar516._8_4_));
          pfVar9[3] = (float)((uint)bVar22 *
                              ((uint)bVar20 * auVar496._12_4_ | (uint)!bVar20 * auVar504._12_4_) |
                             (uint)!bVar22 *
                             ((uint)bVar21 * auVar497._12_4_ | (uint)!bVar21 * auVar516._12_4_));
          lVar425 = lVar425 + 4;
        } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
        return;
      }
      if (aw != 1) {
        return;
      }
      if (iVar421 == 0x10) {
        auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
        auVar713 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar712._8_4_ = 0x80000000;
        auVar712._0_8_ = 0x8000000080000000;
        auVar712._12_4_ = 0x80000000;
        auVar712._16_4_ = 0x80000000;
        auVar712._20_4_ = 0x80000000;
        auVar712._24_4_ = 0x80000000;
        auVar712._28_4_ = 0x80000000;
        auVar712._32_4_ = 0x80000000;
        auVar712._36_4_ = 0x80000000;
        auVar712._40_4_ = 0x80000000;
        auVar712._44_4_ = 0x80000000;
        auVar712._48_4_ = 0x80000000;
        auVar712._52_4_ = 0x80000000;
        auVar712._56_4_ = 0x80000000;
        auVar712._60_4_ = 0x80000000;
        auVar712 = vpternlogd_avx512f(auVar713,auVar730,auVar712,0xf8);
        auVar1755 = ZEXT864(0);
        auVar713 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        uVar46 = vcmpps_avx512f(auVar712,auVar1755,1);
        auVar712 = vdivps_avx512f(auVar713,auVar730);
        auVar714 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar715._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar714._4_4_;
        auVar715._0_4_ = (uint)((byte)uVar46 & 1) * auVar714._0_4_;
        auVar715._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar714._8_4_;
        auVar715._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar714._12_4_;
        auVar715._16_4_ = (uint)((byte)(uVar46 >> 4) & 1) * auVar714._16_4_;
        auVar715._20_4_ = (uint)((byte)(uVar46 >> 5) & 1) * auVar714._20_4_;
        auVar715._24_4_ = (uint)((byte)(uVar46 >> 6) & 1) * auVar714._24_4_;
        auVar715._28_4_ = (uint)((byte)(uVar46 >> 7) & 1) * auVar714._28_4_;
        auVar715._32_4_ = (uint)((byte)(uVar46 >> 8) & 1) * auVar714._32_4_;
        auVar715._36_4_ = (uint)((byte)(uVar46 >> 9) & 1) * auVar714._36_4_;
        auVar715._40_4_ = (uint)((byte)(uVar46 >> 10) & 1) * auVar714._40_4_;
        auVar715._44_4_ = (uint)((byte)(uVar46 >> 0xb) & 1) * auVar714._44_4_;
        auVar715._48_4_ = (uint)((byte)(uVar46 >> 0xc) & 1) * auVar714._48_4_;
        auVar715._52_4_ = (uint)((byte)(uVar46 >> 0xd) & 1) * auVar714._52_4_;
        auVar715._56_4_ = (uint)((byte)(uVar46 >> 0xe) & 1) * auVar714._56_4_;
        auVar715._60_4_ = (uint)(byte)(uVar46 >> 0xf) * auVar714._60_4_;
        uVar46 = vcmpps_avx512f(auVar730,auVar1755,1);
        uVar426 = vcmpps_avx512f(auVar730,auVar1755,4);
        auVar730 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar714 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar716 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar717 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar721 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar725 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar726 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        uVar424 = uVar422;
        do {
          auVar845 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          uVar427 = vcmpps_avx512f(auVar845,auVar1755,1);
          auVar732._8_4_ = 0xc0490fdb;
          auVar732._0_8_ = 0xc0490fdbc0490fdb;
          auVar732._12_4_ = 0xc0490fdb;
          auVar732._16_4_ = 0xc0490fdb;
          auVar732._20_4_ = 0xc0490fdb;
          auVar732._24_4_ = 0xc0490fdb;
          auVar732._28_4_ = 0xc0490fdb;
          auVar732._32_4_ = 0xc0490fdb;
          auVar732._36_4_ = 0xc0490fdb;
          auVar732._40_4_ = 0xc0490fdb;
          auVar732._44_4_ = 0xc0490fdb;
          auVar732._48_4_ = 0xc0490fdb;
          auVar732._52_4_ = 0xc0490fdb;
          auVar732._56_4_ = 0xc0490fdb;
          auVar732._60_4_ = 0xc0490fdb;
          auVar732 = vblendmps_avx512f(auVar714,auVar732);
          bVar11 = (bool)((byte)uVar427 & 1);
          auVar804._0_4_ = (uint)bVar11 * auVar732._0_4_ | (uint)!bVar11 * in_ZMM18._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar804._4_4_ = (uint)bVar11 * auVar732._4_4_ | (uint)!bVar11 * in_ZMM18._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar804._8_4_ = (uint)bVar11 * auVar732._8_4_ | (uint)!bVar11 * in_ZMM18._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar804._12_4_ = (uint)bVar11 * auVar732._12_4_ | (uint)!bVar11 * in_ZMM18._12_4_;
          bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
          auVar804._16_4_ = (uint)bVar11 * auVar732._16_4_ | (uint)!bVar11 * in_ZMM18._16_4_;
          bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
          auVar804._20_4_ = (uint)bVar11 * auVar732._20_4_ | (uint)!bVar11 * in_ZMM18._20_4_;
          bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
          auVar804._24_4_ = (uint)bVar11 * auVar732._24_4_ | (uint)!bVar11 * in_ZMM18._24_4_;
          bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
          auVar804._28_4_ = (uint)bVar11 * auVar732._28_4_ | (uint)!bVar11 * in_ZMM18._28_4_;
          bVar11 = (bool)((byte)(uVar427 >> 8) & 1);
          auVar804._32_4_ = (uint)bVar11 * auVar732._32_4_ | (uint)!bVar11 * in_ZMM18._32_4_;
          bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
          auVar804._36_4_ = (uint)bVar11 * auVar732._36_4_ | (uint)!bVar11 * in_ZMM18._36_4_;
          bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
          auVar804._40_4_ = (uint)bVar11 * auVar732._40_4_ | (uint)!bVar11 * in_ZMM18._40_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
          auVar804._44_4_ = (uint)bVar11 * auVar732._44_4_ | (uint)!bVar11 * in_ZMM18._44_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
          auVar804._48_4_ = (uint)bVar11 * auVar732._48_4_ | (uint)!bVar11 * in_ZMM18._48_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
          auVar804._52_4_ = (uint)bVar11 * auVar732._52_4_ | (uint)!bVar11 * in_ZMM18._52_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
          auVar804._56_4_ = (uint)bVar11 * auVar732._56_4_ | (uint)!bVar11 * in_ZMM18._56_4_;
          bVar11 = SUB81(uVar427 >> 0xf,0);
          auVar804._60_4_ = (uint)bVar11 * auVar732._60_4_ | (uint)!bVar11 * in_ZMM18._60_4_;
          in_ZMM19 = vmulps_avx512f(auVar845,auVar712);
          auVar732 = vandps_avx512dq(in_ZMM19,auVar716);
          uVar427 = vcmpps_avx512f(auVar713,auVar732,1);
          auVar727._8_4_ = 0xbf800000;
          auVar727._0_8_ = 0xbf800000bf800000;
          auVar727._12_4_ = 0xbf800000;
          auVar727._16_4_ = 0xbf800000;
          auVar727._20_4_ = 0xbf800000;
          auVar727._24_4_ = 0xbf800000;
          auVar727._28_4_ = 0xbf800000;
          auVar727._32_4_ = 0xbf800000;
          auVar727._36_4_ = 0xbf800000;
          auVar727._40_4_ = 0xbf800000;
          auVar727._44_4_ = 0xbf800000;
          auVar727._48_4_ = 0xbf800000;
          auVar727._52_4_ = 0xbf800000;
          auVar727._56_4_ = 0xbf800000;
          auVar727._60_4_ = 0xbf800000;
          auVar729 = vblendmps_avx512f(auVar732,auVar727);
          bVar11 = (bool)((byte)uVar427 & 1);
          auVar805._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar805._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar805._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar805._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
          auVar805._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
          bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
          auVar805._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
          bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
          auVar805._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
          bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
          auVar805._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
          bVar28 = (byte)(uVar427 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar805._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * in_ZMM21._32_4_;
          bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
          auVar805._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * in_ZMM21._36_4_;
          bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
          auVar805._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * in_ZMM21._40_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
          auVar805._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * in_ZMM21._44_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
          auVar805._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * in_ZMM21._48_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
          auVar805._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * in_ZMM21._52_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
          auVar805._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * in_ZMM21._56_4_;
          bVar11 = SUB81(uVar427 >> 0xf,0);
          auVar805._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * in_ZMM21._60_4_;
          auVar732 = vmaxps_avx512f(auVar732,auVar713);
          auVar732 = vdivps_avx512f(auVar805,auVar732);
          in_ZMM21 = vmulps_avx512f(auVar732,auVar732);
          in_ZMM22 = vmulps_avx512f(in_ZMM21,in_ZMM21);
          auVar729 = vfmadd213ps_avx512f(auVar717,in_ZMM22,auVar718);
          auVar729 = vfmadd213ps_avx512f(auVar729,in_ZMM22,auVar719);
          auVar727 = vfmadd213ps_avx512f(auVar721,in_ZMM22,auVar722);
          auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar723);
          auVar729 = vfmadd213ps_avx512f(auVar729,in_ZMM22,auVar720);
          auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar724);
          auVar727 = vfmadd213ps_avx512f(auVar727,in_ZMM22,auVar713);
          auVar729 = vfmadd231ps_avx512f(auVar727,in_ZMM21,auVar729);
          auVar732 = vmulps_avx512f(auVar729,auVar732);
          auVar729 = vaddps_avx512f(auVar732,auVar725);
          bVar11 = (bool)((byte)uVar427 & 1);
          auVar806._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar732._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar806._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar732._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar806._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar732._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar806._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar732._12_4_;
          bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
          auVar806._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar732._16_4_;
          bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
          auVar806._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar732._20_4_;
          bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
          auVar806._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar732._24_4_;
          bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
          auVar806._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar732._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar806._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar732._32_4_;
          bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
          auVar806._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar732._36_4_;
          bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
          auVar806._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar732._40_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
          auVar806._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar732._44_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
          auVar806._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar732._48_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
          auVar806._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar732._52_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
          auVar806._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar732._56_4_;
          bVar11 = SUB81(uVar427 >> 0xf,0);
          auVar806._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar732._60_4_;
          auVar732 = vpternlogd_avx512f(auVar806,in_ZMM19,auVar730,0xf8);
          auVar729 = vaddps_avx512f(auVar732,auVar804);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar13 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar46 >> 6) & 1);
          bVar19 = (bool)((byte)(uVar46 >> 7) & 1);
          bVar20 = (bool)((byte)(uVar46 >> 8) & 1);
          bVar21 = (bool)((byte)(uVar46 >> 9) & 1);
          bVar22 = (bool)((byte)(uVar46 >> 10) & 1);
          bVar23 = (bool)((byte)(uVar46 >> 0xb) & 1);
          bVar24 = (bool)((byte)(uVar46 >> 0xc) & 1);
          bVar25 = (bool)((byte)(uVar46 >> 0xd) & 1);
          bVar26 = (bool)((byte)(uVar46 >> 0xe) & 1);
          bVar27 = SUB81(uVar46 >> 0xf,0);
          uVar427 = vcmpps_avx512f(auVar845,auVar1755,4);
          auVar845 = vpternlogd_avx512f(auVar845,auVar730,auVar726,0xea);
          bVar12 = (bool)((byte)uVar426 & 1);
          auVar807._0_4_ =
               (uint)bVar12 * ((uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar732._0_4_) |
               (uint)!bVar12 * auVar845._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar807._4_4_ =
               (uint)bVar11 * ((uint)bVar13 * auVar729._4_4_ | (uint)!bVar13 * auVar732._4_4_) |
               (uint)!bVar11 * auVar845._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar807._8_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar729._8_4_ | (uint)!bVar14 * auVar732._8_4_) |
               (uint)!bVar11 * auVar845._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar807._12_4_ =
               (uint)bVar11 * ((uint)bVar15 * auVar729._12_4_ | (uint)!bVar15 * auVar732._12_4_) |
               (uint)!bVar11 * auVar845._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar807._16_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar729._16_4_ | (uint)!bVar16 * auVar732._16_4_) |
               (uint)!bVar11 * auVar845._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar807._20_4_ =
               (uint)bVar11 * ((uint)bVar17 * auVar729._20_4_ | (uint)!bVar17 * auVar732._20_4_) |
               (uint)!bVar11 * auVar845._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar807._24_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar729._24_4_ | (uint)!bVar18 * auVar732._24_4_) |
               (uint)!bVar11 * auVar845._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar807._28_4_ =
               (uint)bVar11 * ((uint)bVar19 * auVar729._28_4_ | (uint)!bVar19 * auVar732._28_4_) |
               (uint)!bVar11 * auVar845._28_4_;
          bVar11 = (bool)((byte)(uVar426 >> 8) & 1);
          auVar807._32_4_ =
               (uint)bVar11 * ((uint)bVar20 * auVar729._32_4_ | (uint)!bVar20 * auVar732._32_4_) |
               (uint)!bVar11 * auVar845._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar807._36_4_ =
               (uint)bVar11 * ((uint)bVar21 * auVar729._36_4_ | (uint)!bVar21 * auVar732._36_4_) |
               (uint)!bVar11 * auVar845._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar807._40_4_ =
               (uint)bVar11 * ((uint)bVar22 * auVar729._40_4_ | (uint)!bVar22 * auVar732._40_4_) |
               (uint)!bVar11 * auVar845._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar807._44_4_ =
               (uint)bVar11 * ((uint)bVar23 * auVar729._44_4_ | (uint)!bVar23 * auVar732._44_4_) |
               (uint)!bVar11 * auVar845._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar807._48_4_ =
               (uint)bVar11 * ((uint)bVar24 * auVar729._48_4_ | (uint)!bVar24 * auVar732._48_4_) |
               (uint)!bVar11 * auVar845._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar807._52_4_ =
               (uint)bVar11 * ((uint)bVar25 * auVar729._52_4_ | (uint)!bVar25 * auVar732._52_4_) |
               (uint)!bVar11 * auVar845._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar807._56_4_ =
               (uint)bVar11 * ((uint)bVar26 * auVar729._56_4_ | (uint)!bVar26 * auVar732._56_4_) |
               (uint)!bVar11 * auVar845._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar807._60_4_ =
               (uint)bVar11 * ((uint)bVar27 * auVar729._60_4_ | (uint)!bVar27 * auVar732._60_4_) |
               (uint)!bVar11 * auVar845._60_4_;
          auVar732 = vblendmps_avx512f(auVar715,auVar807);
          bVar11 = (bool)((byte)uVar427 & 1);
          bVar12 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar427 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar427 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar427 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar427 >> 6) & 1);
          bVar18 = (bool)((byte)(uVar427 >> 7) & 1);
          bVar19 = (bool)((byte)(uVar427 >> 8) & 1);
          bVar20 = (bool)((byte)(uVar427 >> 9) & 1);
          bVar21 = (bool)((byte)(uVar427 >> 10) & 1);
          bVar22 = (bool)((byte)(uVar427 >> 0xb) & 1);
          bVar23 = (bool)((byte)(uVar427 >> 0xc) & 1);
          bVar24 = (bool)((byte)(uVar427 >> 0xd) & 1);
          bVar25 = (bool)((byte)(uVar427 >> 0xe) & 1);
          bVar26 = SUB81(uVar427 >> 0xf,0);
          *(uint *)*(undefined1 (*) [32])outptr =
               (uint)bVar11 * auVar732._0_4_ | !bVar11 * auVar807._0_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 4) =
               (uint)bVar12 * auVar732._4_4_ | !bVar12 * auVar807._4_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 8) =
               (uint)bVar13 * auVar732._8_4_ | !bVar13 * auVar807._8_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0xc) =
               (uint)bVar14 * auVar732._12_4_ | !bVar14 * auVar807._12_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x10) =
               (uint)bVar15 * auVar732._16_4_ | !bVar15 * auVar807._16_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x14) =
               (uint)bVar16 * auVar732._20_4_ | !bVar16 * auVar807._20_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x18) =
               (uint)bVar17 * auVar732._24_4_ | !bVar17 * auVar807._24_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x1c) =
               (uint)bVar18 * auVar732._28_4_ | !bVar18 * auVar807._28_4_;
          *(uint *)*(undefined1 (*) [32])((long)outptr + 0x20) =
               (uint)bVar19 * auVar732._32_4_ | !bVar19 * auVar807._32_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 4) =
               (uint)bVar20 * auVar732._36_4_ | !bVar20 * auVar807._36_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 8) =
               (uint)bVar21 * auVar732._40_4_ | !bVar21 * auVar807._40_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0xc) =
               (uint)bVar22 * auVar732._44_4_ | !bVar22 * auVar807._44_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x10) =
               (uint)bVar23 * auVar732._48_4_ | !bVar23 * auVar807._48_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x14) =
               (uint)bVar24 * auVar732._52_4_ | !bVar24 * auVar807._52_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x18) =
               (uint)bVar25 * auVar732._56_4_ | !bVar25 * auVar807._56_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x1c) =
               (uint)bVar26 * auVar732._60_4_ | !bVar26 * auVar807._60_4_;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
          in_ZMM18 = auVar804;
        } while (uVar424 != 0);
      }
      if (iVar421 == 8) {
        auVar671 = *(undefined1 (*) [32])ptr;
        uVar424 = 0;
        if (1 < (int)uVar422) {
          auVar730 = vinserti64x4_avx512f(ZEXT3264(auVar671),auVar671,1);
          auVar712 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
          auVar713._8_4_ = 0x80000000;
          auVar713._0_8_ = 0x8000000080000000;
          auVar713._12_4_ = 0x80000000;
          auVar713._16_4_ = 0x80000000;
          auVar713._20_4_ = 0x80000000;
          auVar713._24_4_ = 0x80000000;
          auVar713._28_4_ = 0x80000000;
          auVar713._32_4_ = 0x80000000;
          auVar713._36_4_ = 0x80000000;
          auVar713._40_4_ = 0x80000000;
          auVar713._44_4_ = 0x80000000;
          auVar713._48_4_ = 0x80000000;
          auVar713._52_4_ = 0x80000000;
          auVar713._56_4_ = 0x80000000;
          auVar713._60_4_ = 0x80000000;
          auVar712 = vpternlogd_avx512f(auVar712,auVar730,auVar713,0xf8);
          auVar732 = ZEXT1664(ZEXT816(0) << 0x40);
          uVar46 = vcmpps_avx512f(auVar712,auVar732,1);
          auVar712 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar714._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar712._4_4_;
          auVar714._0_4_ = (uint)((byte)uVar46 & 1) * auVar712._0_4_;
          auVar714._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar712._8_4_;
          auVar714._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar712._12_4_;
          auVar714._16_4_ = (uint)((byte)(uVar46 >> 4) & 1) * auVar712._16_4_;
          auVar714._20_4_ = (uint)((byte)(uVar46 >> 5) & 1) * auVar712._20_4_;
          auVar714._24_4_ = (uint)((byte)(uVar46 >> 6) & 1) * auVar712._24_4_;
          auVar714._28_4_ = (uint)((byte)(uVar46 >> 7) & 1) * auVar712._28_4_;
          auVar714._32_4_ = (uint)((byte)(uVar46 >> 8) & 1) * auVar712._32_4_;
          auVar714._36_4_ = (uint)((byte)(uVar46 >> 9) & 1) * auVar712._36_4_;
          auVar714._40_4_ = (uint)((byte)(uVar46 >> 10) & 1) * auVar712._40_4_;
          auVar714._44_4_ = (uint)((byte)(uVar46 >> 0xb) & 1) * auVar712._44_4_;
          auVar714._48_4_ = (uint)((byte)(uVar46 >> 0xc) & 1) * auVar712._48_4_;
          auVar714._52_4_ = (uint)((byte)(uVar46 >> 0xd) & 1) * auVar712._52_4_;
          auVar714._56_4_ = (uint)((byte)(uVar46 >> 0xe) & 1) * auVar712._56_4_;
          auVar714._60_4_ = (uint)(byte)(uVar46 >> 0xf) * auVar712._60_4_;
          auVar712 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
          auVar713 = vdivps_avx512f(auVar712,auVar730);
          iVar423 = 1;
          uVar46 = vcmpps_avx512f(auVar730,auVar732,1);
          uVar426 = vcmpps_avx512f(auVar730,auVar732,4);
          auVar715 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
          auVar716 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
          auVar717 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
          auVar718 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
          auVar719 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
          auVar720 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
          auVar721 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
          auVar722 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
          auVar723 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
          auVar724 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
          auVar725 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
          auVar726 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
          auVar1755 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
          auVar730 = in_ZMM21;
          do {
            auVar672 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar675 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
            auVar845 = vinsertf64x4_avx512f(ZEXT3264(auVar672),auVar675,1);
            in_ZMM19 = vmulps_avx512f(auVar845,auVar713);
            uVar427 = vcmpps_avx512f(auVar845,auVar732,1);
            auVar729 = vandps_avx512dq(in_ZMM19,auVar717);
            auVar334._8_4_ = 0xc0490fdb;
            auVar334._0_8_ = 0xc0490fdbc0490fdb;
            auVar334._12_4_ = 0xc0490fdb;
            auVar334._16_4_ = 0xc0490fdb;
            auVar334._20_4_ = 0xc0490fdb;
            auVar334._24_4_ = 0xc0490fdb;
            auVar334._28_4_ = 0xc0490fdb;
            auVar334._32_4_ = 0xc0490fdb;
            auVar334._36_4_ = 0xc0490fdb;
            auVar334._40_4_ = 0xc0490fdb;
            auVar334._44_4_ = 0xc0490fdb;
            auVar334._48_4_ = 0xc0490fdb;
            auVar334._52_4_ = 0xc0490fdb;
            auVar334._56_4_ = 0xc0490fdb;
            auVar334._60_4_ = 0xc0490fdb;
            auVar727 = vblendmps_avx512f(auVar716,auVar334);
            bVar11 = (bool)((byte)uVar427 & 1);
            in_ZMM21._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar730._0_4_;
            bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
            in_ZMM21._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar730._4_4_;
            bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
            in_ZMM21._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar730._8_4_;
            bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
            in_ZMM21._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar730._12_4_;
            bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
            in_ZMM21._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar730._16_4_;
            bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
            in_ZMM21._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar730._20_4_;
            bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
            in_ZMM21._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar730._24_4_;
            bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
            in_ZMM21._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar730._28_4_;
            bVar11 = (bool)((byte)(uVar427 >> 8) & 1);
            in_ZMM21._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar730._32_4_;
            bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
            in_ZMM21._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar730._36_4_;
            bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
            in_ZMM21._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar730._40_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
            in_ZMM21._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar730._44_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
            in_ZMM21._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar730._48_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
            in_ZMM21._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar730._52_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
            in_ZMM21._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar730._56_4_;
            bVar11 = SUB81(uVar427 >> 0xf,0);
            in_ZMM21._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar730._60_4_;
            uVar427 = vcmpps_avx512f(auVar712,auVar729,1);
            auVar335._8_4_ = 0xbf800000;
            auVar335._0_8_ = 0xbf800000bf800000;
            auVar335._12_4_ = 0xbf800000;
            auVar335._16_4_ = 0xbf800000;
            auVar335._20_4_ = 0xbf800000;
            auVar335._24_4_ = 0xbf800000;
            auVar335._28_4_ = 0xbf800000;
            auVar335._32_4_ = 0xbf800000;
            auVar335._36_4_ = 0xbf800000;
            auVar335._40_4_ = 0xbf800000;
            auVar335._44_4_ = 0xbf800000;
            auVar335._48_4_ = 0xbf800000;
            auVar335._52_4_ = 0xbf800000;
            auVar335._56_4_ = 0xbf800000;
            auVar335._60_4_ = 0xbf800000;
            auVar730 = vblendmps_avx512f(auVar729,auVar335);
            bVar11 = (bool)((byte)uVar427 & 1);
            auVar808._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * in_ZMM22._0_4_;
            bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
            auVar808._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
            bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
            auVar808._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
            bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
            auVar808._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
            bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
            auVar808._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
            bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
            auVar808._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
            bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
            auVar808._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
            bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
            auVar808._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
            bVar28 = (byte)(uVar427 >> 8);
            bVar11 = (bool)(bVar28 & 1);
            auVar808._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * in_ZMM22._32_4_;
            bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
            auVar808._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * in_ZMM22._36_4_;
            bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
            auVar808._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * in_ZMM22._40_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
            auVar808._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * in_ZMM22._44_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
            auVar808._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * in_ZMM22._48_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
            auVar808._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * in_ZMM22._52_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
            auVar808._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * in_ZMM22._56_4_;
            bVar11 = SUB81(uVar427 >> 0xf,0);
            auVar808._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * in_ZMM22._60_4_;
            auVar730 = vmaxps_avx512f(auVar729,auVar712);
            auVar730 = vdivps_avx512f(auVar808,auVar730);
            in_ZMM22 = vmulps_avx512f(auVar730,auVar730);
            auVar729 = vmulps_avx512f(in_ZMM22,in_ZMM22);
            auVar727 = vfmadd213ps_avx512f(auVar718,auVar729,auVar719);
            auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar720);
            auVar728 = vfmadd213ps_avx512f(auVar722,auVar729,auVar723);
            auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar724);
            auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar725);
            auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar721);
            auVar729 = vfmadd213ps_avx512f(auVar728,auVar729,auVar712);
            auVar729 = vfmadd231ps_avx512f(auVar729,in_ZMM22,auVar727);
            auVar730 = vmulps_avx512f(auVar729,auVar730);
            uVar428 = vcmpps_avx512f(auVar845,auVar732,4);
            auVar729 = vaddps_avx512f(auVar730,auVar726);
            bVar11 = (bool)((byte)uVar427 & 1);
            auVar809._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
            bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
            auVar809._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
            bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
            auVar809._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
            bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
            auVar809._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
            bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
            auVar809._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
            bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
            auVar809._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
            bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
            auVar809._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
            bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
            auVar809._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
            bVar11 = (bool)(bVar28 & 1);
            auVar809._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
            bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
            auVar809._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
            bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
            auVar809._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
            auVar809._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
            auVar809._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
            auVar809._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
            bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
            auVar809._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
            bVar11 = SUB81(uVar427 >> 0xf,0);
            auVar809._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
            auVar730 = vpternlogd_avx512f(auVar809,in_ZMM19,auVar715,0xf8);
            auVar729 = vaddps_avx512f(auVar730,in_ZMM21);
            bVar11 = (bool)((byte)uVar46 & 1);
            bVar13 = (bool)((byte)(uVar46 >> 1) & 1);
            bVar14 = (bool)((byte)(uVar46 >> 2) & 1);
            bVar15 = (bool)((byte)(uVar46 >> 3) & 1);
            bVar16 = (bool)((byte)(uVar46 >> 4) & 1);
            bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
            bVar18 = (bool)((byte)(uVar46 >> 6) & 1);
            bVar19 = (bool)((byte)(uVar46 >> 7) & 1);
            bVar20 = (bool)((byte)(uVar46 >> 8) & 1);
            bVar21 = (bool)((byte)(uVar46 >> 9) & 1);
            bVar22 = (bool)((byte)(uVar46 >> 10) & 1);
            bVar23 = (bool)((byte)(uVar46 >> 0xb) & 1);
            bVar24 = (bool)((byte)(uVar46 >> 0xc) & 1);
            bVar25 = (bool)((byte)(uVar46 >> 0xd) & 1);
            bVar26 = (bool)((byte)(uVar46 >> 0xe) & 1);
            bVar27 = SUB81(uVar46 >> 0xf,0);
            auVar845 = vpternlogd_avx512f(auVar845,auVar715,auVar1755,0xea);
            bVar12 = (bool)((byte)uVar426 & 1);
            auVar810._0_4_ =
                 (uint)bVar12 * ((uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_) |
                 (uint)!bVar12 * auVar845._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar810._4_4_ =
                 (uint)bVar11 * ((uint)bVar13 * auVar729._4_4_ | (uint)!bVar13 * auVar730._4_4_) |
                 (uint)!bVar11 * auVar845._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar810._8_4_ =
                 (uint)bVar11 * ((uint)bVar14 * auVar729._8_4_ | (uint)!bVar14 * auVar730._8_4_) |
                 (uint)!bVar11 * auVar845._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar810._12_4_ =
                 (uint)bVar11 * ((uint)bVar15 * auVar729._12_4_ | (uint)!bVar15 * auVar730._12_4_) |
                 (uint)!bVar11 * auVar845._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar810._16_4_ =
                 (uint)bVar11 * ((uint)bVar16 * auVar729._16_4_ | (uint)!bVar16 * auVar730._16_4_) |
                 (uint)!bVar11 * auVar845._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar810._20_4_ =
                 (uint)bVar11 * ((uint)bVar17 * auVar729._20_4_ | (uint)!bVar17 * auVar730._20_4_) |
                 (uint)!bVar11 * auVar845._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar810._24_4_ =
                 (uint)bVar11 * ((uint)bVar18 * auVar729._24_4_ | (uint)!bVar18 * auVar730._24_4_) |
                 (uint)!bVar11 * auVar845._24_4_;
            bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
            auVar810._28_4_ =
                 (uint)bVar11 * ((uint)bVar19 * auVar729._28_4_ | (uint)!bVar19 * auVar730._28_4_) |
                 (uint)!bVar11 * auVar845._28_4_;
            bVar11 = (bool)((byte)(uVar426 >> 8) & 1);
            auVar810._32_4_ =
                 (uint)bVar11 * ((uint)bVar20 * auVar729._32_4_ | (uint)!bVar20 * auVar730._32_4_) |
                 (uint)!bVar11 * auVar845._32_4_;
            bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
            auVar810._36_4_ =
                 (uint)bVar11 * ((uint)bVar21 * auVar729._36_4_ | (uint)!bVar21 * auVar730._36_4_) |
                 (uint)!bVar11 * auVar845._36_4_;
            bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
            auVar810._40_4_ =
                 (uint)bVar11 * ((uint)bVar22 * auVar729._40_4_ | (uint)!bVar22 * auVar730._40_4_) |
                 (uint)!bVar11 * auVar845._40_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
            auVar810._44_4_ =
                 (uint)bVar11 * ((uint)bVar23 * auVar729._44_4_ | (uint)!bVar23 * auVar730._44_4_) |
                 (uint)!bVar11 * auVar845._44_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
            auVar810._48_4_ =
                 (uint)bVar11 * ((uint)bVar24 * auVar729._48_4_ | (uint)!bVar24 * auVar730._48_4_) |
                 (uint)!bVar11 * auVar845._48_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
            auVar810._52_4_ =
                 (uint)bVar11 * ((uint)bVar25 * auVar729._52_4_ | (uint)!bVar25 * auVar730._52_4_) |
                 (uint)!bVar11 * auVar845._52_4_;
            bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
            auVar810._56_4_ =
                 (uint)bVar11 * ((uint)bVar26 * auVar729._56_4_ | (uint)!bVar26 * auVar730._56_4_) |
                 (uint)!bVar11 * auVar845._56_4_;
            bVar11 = SUB81(uVar426 >> 0xf,0);
            auVar810._60_4_ =
                 (uint)bVar11 * ((uint)bVar27 * auVar729._60_4_ | (uint)!bVar27 * auVar730._60_4_) |
                 (uint)!bVar11 * auVar845._60_4_;
            auVar730 = vblendmps_avx512f(auVar714,auVar810);
            bVar11 = (bool)((byte)uVar428 & 1);
            bVar12 = (bool)((byte)(uVar428 >> 1) & 1);
            bVar13 = (bool)((byte)(uVar428 >> 2) & 1);
            bVar14 = (bool)((byte)(uVar428 >> 3) & 1);
            bVar15 = (bool)((byte)(uVar428 >> 4) & 1);
            bVar16 = (bool)((byte)(uVar428 >> 5) & 1);
            bVar17 = (bool)((byte)(uVar428 >> 6) & 1);
            bVar18 = (bool)((byte)(uVar428 >> 7) & 1);
            bVar19 = (bool)((byte)(uVar428 >> 8) & 1);
            bVar20 = (bool)((byte)(uVar428 >> 9) & 1);
            bVar21 = (bool)((byte)(uVar428 >> 10) & 1);
            bVar22 = (bool)((byte)(uVar428 >> 0xb) & 1);
            bVar23 = (bool)((byte)(uVar428 >> 0xc) & 1);
            bVar24 = (bool)((byte)(uVar428 >> 0xd) & 1);
            bVar25 = (bool)((byte)(uVar428 >> 0xe) & 1);
            bVar26 = SUB81(uVar428 >> 0xf,0);
            *(uint *)*(undefined1 (*) [32])outptr =
                 (uint)bVar11 * auVar730._0_4_ | !bVar11 * auVar810._0_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 4) =
                 (uint)bVar12 * auVar730._4_4_ | !bVar12 * auVar810._4_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 8) =
                 (uint)bVar13 * auVar730._8_4_ | !bVar13 * auVar810._8_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0xc) =
                 (uint)bVar14 * auVar730._12_4_ | !bVar14 * auVar810._12_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x10) =
                 (uint)bVar15 * auVar730._16_4_ | !bVar15 * auVar810._16_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x14) =
                 (uint)bVar16 * auVar730._20_4_ | !bVar16 * auVar810._20_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x18) =
                 (uint)bVar17 * auVar730._24_4_ | !bVar17 * auVar810._24_4_;
            *(uint *)((long)*(undefined1 (*) [32])outptr + 0x1c) =
                 (uint)bVar18 * auVar730._28_4_ | !bVar18 * auVar810._28_4_;
            *(uint *)*(undefined1 (*) [32])((long)outptr + 0x20) =
                 (uint)bVar19 * auVar730._32_4_ | !bVar19 * auVar810._32_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 4) =
                 (uint)bVar20 * auVar730._36_4_ | !bVar20 * auVar810._36_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 8) =
                 (uint)bVar21 * auVar730._40_4_ | !bVar21 * auVar810._40_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0xc) =
                 (uint)bVar22 * auVar730._44_4_ | !bVar22 * auVar810._44_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x10) =
                 (uint)bVar23 * auVar730._48_4_ | !bVar23 * auVar810._48_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x14) =
                 (uint)bVar24 * auVar730._52_4_ | !bVar24 * auVar810._52_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x18) =
                 (uint)bVar25 * auVar730._56_4_ | !bVar25 * auVar810._56_4_;
            *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x1c) =
                 (uint)bVar26 * auVar730._60_4_ | !bVar26 * auVar810._60_4_;
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
            auVar730 = in_ZMM21;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          auVar560._8_4_ = 0x40490fdb;
          auVar560._0_8_ = 0x40490fdb40490fdb;
          auVar560._12_4_ = 0x40490fdb;
          auVar560._16_4_ = 0x40490fdb;
          auVar560._20_4_ = 0x40490fdb;
          auVar560._24_4_ = 0x40490fdb;
          auVar560._28_4_ = 0x40490fdb;
          auVar1241._8_4_ = 0x80000000;
          auVar1241._0_8_ = 0x8000000080000000;
          auVar1241._12_4_ = 0x80000000;
          auVar1241._16_4_ = 0x80000000;
          auVar1241._20_4_ = 0x80000000;
          auVar1241._24_4_ = 0x80000000;
          auVar1241._28_4_ = 0x80000000;
          auVar675 = vpternlogd_avx512vl(auVar1241,auVar671,auVar560,0xea);
          auVar1048._8_4_ = 0x3f800000;
          auVar1048._0_8_ = 0x3f8000003f800000;
          auVar1048._12_4_ = 0x3f800000;
          auVar1048._16_4_ = 0x3f800000;
          auVar1048._20_4_ = 0x3f800000;
          auVar1048._24_4_ = 0x3f800000;
          auVar1048._28_4_ = 0x3f800000;
          auVar672 = vdivps_avx(auVar1048,auVar671);
          auVar462 = ZEXT816(0) << 0x40;
          uVar45 = vcmpps_avx512vl(ZEXT1632(auVar462),auVar675,2);
          uVar46 = vcmpps_avx512vl(auVar671,ZEXT1632(auVar462),1);
          auVar1242._8_4_ = 0x80000000;
          auVar1242._0_8_ = 0x8000000080000000;
          auVar1242._12_4_ = 0x80000000;
          auVar1242._16_4_ = 0x80000000;
          auVar1242._20_4_ = 0x80000000;
          auVar1242._24_4_ = 0x80000000;
          auVar1242._28_4_ = 0x80000000;
          auVar1302._8_4_ = 0x40490fdb;
          auVar1302._0_8_ = 0x40490fdb40490fdb;
          auVar1302._12_4_ = 0x40490fdb;
          auVar1302._16_4_ = 0x40490fdb;
          auVar1302._20_4_ = 0x40490fdb;
          auVar1302._24_4_ = 0x40490fdb;
          auVar1302._28_4_ = 0x40490fdb;
          auVar1360._8_4_ = 0x7fffffff;
          auVar1360._0_8_ = 0x7fffffff7fffffff;
          auVar1360._12_4_ = 0x7fffffff;
          auVar1360._16_4_ = 0x7fffffff;
          auVar1360._20_4_ = 0x7fffffff;
          auVar1360._24_4_ = 0x7fffffff;
          auVar1360._28_4_ = 0x7fffffff;
          auVar1416._8_4_ = 0xbc83a25c;
          auVar1416._0_8_ = 0xbc83a25cbc83a25c;
          auVar1416._12_4_ = 0xbc83a25c;
          auVar1416._16_4_ = 0xbc83a25c;
          auVar1416._20_4_ = 0xbc83a25c;
          auVar1416._24_4_ = 0xbc83a25c;
          auVar1416._28_4_ = 0xbc83a25c;
          auVar1470._8_4_ = 0xbd99b01e;
          auVar1470._0_8_ = 0xbd99b01ebd99b01e;
          auVar1470._12_4_ = 0xbd99b01e;
          auVar1470._16_4_ = 0xbd99b01e;
          auVar1470._20_4_ = 0xbd99b01e;
          auVar1470._24_4_ = 0xbd99b01e;
          auVar1470._28_4_ = 0xbd99b01e;
          auVar1524._8_4_ = 0xbe117200;
          auVar1524._0_8_ = 0xbe117200be117200;
          auVar1524._12_4_ = 0xbe117200;
          auVar1524._16_4_ = 0xbe117200;
          auVar1524._20_4_ = 0xbe117200;
          auVar1524._24_4_ = 0xbe117200;
          auVar1524._28_4_ = 0xbe117200;
          auVar1578._8_4_ = 0xbeaaaa53;
          auVar1578._0_8_ = 0xbeaaaa53beaaaa53;
          auVar1578._12_4_ = 0xbeaaaa53;
          auVar1578._16_4_ = 0xbeaaaa53;
          auVar1578._20_4_ = 0xbeaaaa53;
          auVar1578._24_4_ = 0xbeaaaa53;
          auVar1578._28_4_ = 0xbeaaaa53;
          auVar1632._8_4_ = 0x3b3ac537;
          auVar1632._0_8_ = 0x3b3ac5373b3ac537;
          auVar1632._12_4_ = 0x3b3ac537;
          auVar1632._16_4_ = 0x3b3ac537;
          auVar1632._20_4_ = 0x3b3ac537;
          auVar1632._24_4_ = 0x3b3ac537;
          auVar1632._28_4_ = 0x3b3ac537;
          auVar1686._8_4_ = 0x3d2edd4e;
          auVar1686._0_8_ = 0x3d2edd4e3d2edd4e;
          auVar1686._12_4_ = 0x3d2edd4e;
          auVar1686._16_4_ = 0x3d2edd4e;
          auVar1686._20_4_ = 0x3d2edd4e;
          auVar1686._24_4_ = 0x3d2edd4e;
          auVar1686._28_4_ = 0x3d2edd4e;
          auVar1738._8_4_ = 0x3dd9ed24;
          auVar1738._0_8_ = 0x3dd9ed243dd9ed24;
          auVar1738._12_4_ = 0x3dd9ed24;
          auVar1738._16_4_ = 0x3dd9ed24;
          auVar1738._20_4_ = 0x3dd9ed24;
          auVar1738._24_4_ = 0x3dd9ed24;
          auVar1738._28_4_ = 0x3dd9ed24;
          auVar1789._8_4_ = 0x3e4cb974;
          auVar1789._0_8_ = 0x3e4cb9743e4cb974;
          auVar1789._12_4_ = 0x3e4cb974;
          auVar1789._16_4_ = 0x3e4cb974;
          auVar1789._20_4_ = 0x3e4cb974;
          auVar1789._24_4_ = 0x3e4cb974;
          auVar1789._28_4_ = 0x3e4cb974;
          auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          auVar684 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
          do {
            auVar676 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
            auVar677 = vmulps_avx512vl(auVar676,auVar672);
            auVar562 = ZEXT1632(auVar462);
            uVar426 = vcmpps_avx512vl(auVar676,auVar562,1);
            vandps_avx512vl(auVar677,auVar1360);
            auVar179._8_4_ = 0xc0490fdb;
            auVar179._0_8_ = 0xc0490fdbc0490fdb;
            auVar179._12_4_ = 0xc0490fdb;
            auVar179._16_4_ = 0xc0490fdb;
            auVar179._20_4_ = 0xc0490fdb;
            auVar179._24_4_ = 0xc0490fdb;
            auVar179._28_4_ = 0xc0490fdb;
            auVar680 = vblendmps_avx512vl(auVar1302,auVar179);
            bVar11 = (bool)((byte)uVar426 & 1);
            auVar627._0_4_ = (uint)bVar11 * auVar680._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar627._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar627._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar627._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar627._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar627._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar627._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar627._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
            in_ZMM21 = ZEXT3264(auVar627);
            uVar426 = vcmpps_avx512vl(auVar1048,auVar677,1);
            auVar180._8_4_ = 0xbf800000;
            auVar180._0_8_ = 0xbf800000bf800000;
            auVar180._12_4_ = 0xbf800000;
            auVar180._16_4_ = 0xbf800000;
            auVar180._20_4_ = 0xbf800000;
            auVar180._24_4_ = 0xbf800000;
            auVar180._28_4_ = 0xbf800000;
            auVar680 = vblendmps_avx512vl(auVar677,auVar180);
            bVar28 = (byte)uVar426;
            auVar628._0_4_ =
                 (uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar628._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar628._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar628._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar628._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar628._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar628._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar628._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
            auVar680 = vdivps_avx512vl(auVar628,auVar677);
            auVar629._0_4_ =
                 (uint)(bVar28 & 1) * auVar680._0_4_ | !(bool)(bVar28 & 1) * auVar628._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar629._4_4_ = (uint)bVar11 * auVar680._4_4_ | !bVar11 * auVar628._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar629._8_4_ = (uint)bVar11 * auVar680._8_4_ | !bVar11 * auVar628._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar629._12_4_ = (uint)bVar11 * auVar680._12_4_ | !bVar11 * auVar628._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar629._16_4_ = (uint)bVar11 * auVar680._16_4_ | !bVar11 * auVar628._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar629._20_4_ = (uint)bVar11 * auVar680._20_4_ | !bVar11 * auVar628._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar629._24_4_ = (uint)bVar11 * auVar680._24_4_ | !bVar11 * auVar628._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar629._28_4_ = (uint)bVar11 * auVar680._28_4_ | !bVar11 * auVar628._28_4_;
            in_ZMM22 = ZEXT3264(auVar629);
            uVar427 = vcmpps_avx512vl(auVar676,auVar562,4);
            auVar680 = vmulps_avx512vl(auVar629,auVar629);
            auVar681 = vmulps_avx512vl(auVar680,auVar680);
            vandps_avx512vl(auVar676,auVar1242);
            auVar676 = vfmadd213ps_avx512vl(auVar1416,auVar681,auVar1470);
            auVar676 = vfmadd213ps_avx512vl(auVar676,auVar681,auVar1524);
            auVar682 = vfmadd213ps_avx512vl(auVar1632,auVar681,auVar1686);
            auVar682 = vfmadd213ps_avx512vl(auVar682,auVar681,auVar1738);
            auVar682 = vfmadd213ps_avx512vl(auVar682,auVar681,auVar1789);
            auVar676 = vfmadd213ps_avx512vl(auVar676,auVar681,auVar1578);
            auVar682 = vfmadd213ps_avx512vl(auVar682,auVar681,auVar1048);
            auVar676 = vfmadd231ps_avx512vl(auVar682,auVar680,auVar676);
            auVar676 = vmulps_avx512vl(auVar676,auVar629);
            uVar428 = vcmpps_avx512vl(auVar671,auVar562,4);
            uVar428 = uVar427 & uVar428;
            auVar680 = vaddps_avx512vl(auVar676,auVar675);
            auVar630._0_4_ =
                 (uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar676._0_4_;
            bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
            auVar630._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * auVar676._4_4_;
            bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
            auVar630._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * auVar676._8_4_;
            bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
            auVar630._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * auVar676._12_4_;
            bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
            auVar630._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * auVar676._16_4_;
            bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
            auVar630._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * auVar676._20_4_;
            bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
            auVar630._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * auVar676._24_4_;
            bVar11 = SUB81(uVar426 >> 7,0);
            auVar630._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * auVar676._28_4_;
            auVar676 = vpternlogd_avx512vl(auVar630,auVar677,auVar1242,0xf8);
            auVar677 = vorps_avx512vl(auVar681,auVar684);
            auVar631._4_4_ = (uint)((byte)(uVar427 >> 1) & 1) * auVar677._4_4_;
            auVar631._0_4_ = (uint)((byte)uVar427 & 1) * auVar677._0_4_;
            auVar631._8_4_ = (uint)((byte)(uVar427 >> 2) & 1) * auVar677._8_4_;
            auVar631._12_4_ = (uint)((byte)(uVar427 >> 3) & 1) * auVar677._12_4_;
            auVar631._16_4_ = (uint)((byte)(uVar427 >> 4) & 1) * auVar677._16_4_;
            auVar631._20_4_ = (uint)((byte)(uVar427 >> 5) & 1) * auVar677._20_4_;
            auVar631._24_4_ = (uint)((byte)(uVar427 >> 6) & 1) * auVar677._24_4_;
            auVar631._28_4_ = (uint)(byte)(uVar427 >> 7) * auVar677._28_4_;
            auVar677 = vaddps_avx512vl(auVar676,auVar627);
            bVar11 = (bool)((byte)uVar46 & 1);
            bVar13 = (bool)((byte)(uVar46 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar46 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
            bVar19 = (bool)((byte)(uVar46 >> 4) & 1);
            bVar21 = (bool)((byte)(uVar46 >> 5) & 1);
            bVar23 = (bool)((byte)(uVar46 >> 6) & 1);
            bVar25 = SUB81(uVar46 >> 7,0);
            bVar28 = (byte)uVar427 | (byte)uVar45;
            auVar680 = vorps_avx512vl(auVar631,auVar560);
            auVar681 = vmovdqa32_avx512vl(auVar631);
            bVar14 = (bool)(bVar28 >> 1 & 1);
            bVar16 = (bool)(bVar28 >> 2 & 1);
            bVar18 = (bool)(bVar28 >> 3 & 1);
            bVar20 = (bool)(bVar28 >> 4 & 1);
            bVar22 = (bool)(bVar28 >> 5 & 1);
            bVar24 = (bool)(bVar28 >> 6 & 1);
            bVar12 = (bool)((byte)uVar428 & 1);
            auVar632._0_4_ =
                 (uint)bVar12 * ((uint)bVar11 * auVar677._0_4_ | (uint)!bVar11 * auVar676._0_4_) |
                 (uint)!bVar12 *
                 ((uint)(bVar28 & 1) * auVar681._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar680._0_4_);
            bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
            auVar632._4_4_ =
                 (uint)bVar11 * ((uint)bVar13 * auVar677._4_4_ | (uint)!bVar13 * auVar676._4_4_) |
                 (uint)!bVar11 * ((uint)bVar14 * auVar681._4_4_ | (uint)!bVar14 * auVar680._4_4_);
            bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
            auVar632._8_4_ =
                 (uint)bVar11 * ((uint)bVar15 * auVar677._8_4_ | (uint)!bVar15 * auVar676._8_4_) |
                 (uint)!bVar11 * ((uint)bVar16 * auVar681._8_4_ | (uint)!bVar16 * auVar680._8_4_);
            bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
            auVar632._12_4_ =
                 (uint)bVar11 * ((uint)bVar17 * auVar677._12_4_ | (uint)!bVar17 * auVar676._12_4_) |
                 (uint)!bVar11 * ((uint)bVar18 * auVar681._12_4_ | (uint)!bVar18 * auVar680._12_4_);
            bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
            auVar632._16_4_ =
                 (uint)bVar11 * ((uint)bVar19 * auVar677._16_4_ | (uint)!bVar19 * auVar676._16_4_) |
                 (uint)!bVar11 * ((uint)bVar20 * auVar681._16_4_ | (uint)!bVar20 * auVar680._16_4_);
            bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
            auVar632._20_4_ =
                 (uint)bVar11 * ((uint)bVar21 * auVar677._20_4_ | (uint)!bVar21 * auVar676._20_4_) |
                 (uint)!bVar11 * ((uint)bVar22 * auVar681._20_4_ | (uint)!bVar22 * auVar680._20_4_);
            bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
            auVar632._24_4_ =
                 (uint)bVar11 * ((uint)bVar23 * auVar677._24_4_ | (uint)!bVar23 * auVar676._24_4_) |
                 (uint)!bVar11 * ((uint)bVar24 * auVar681._24_4_ | (uint)!bVar24 * auVar680._24_4_);
            bVar11 = SUB81(uVar428 >> 7,0);
            auVar632._28_4_ =
                 (uint)bVar11 * ((uint)bVar25 * auVar677._28_4_ | (uint)!bVar25 * auVar676._28_4_) |
                 (uint)!bVar11 *
                 ((uint)(bVar28 >> 7) * auVar681._28_4_ |
                 (uint)!(bool)(bVar28 >> 7) * auVar680._28_4_);
            in_ZMM19 = ZEXT3264(auVar632);
            *(undefined1 (*) [32])outptr = auVar632;
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      if (iVar421 != 4) {
        return;
      }
      auVar462 = *(undefined1 (*) [16])ptr;
      auVar910._16_16_ = auVar462;
      auVar910._0_16_ = auVar462;
      uVar424 = 0;
      if (3 < (int)uVar422) {
        auVar730 = vinserti64x4_avx512f(ZEXT3264(auVar910),auVar910,1);
        auVar712 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar716._8_4_ = 0x80000000;
        auVar716._0_8_ = 0x8000000080000000;
        auVar716._12_4_ = 0x80000000;
        auVar716._16_4_ = 0x80000000;
        auVar716._20_4_ = 0x80000000;
        auVar716._24_4_ = 0x80000000;
        auVar716._28_4_ = 0x80000000;
        auVar716._32_4_ = 0x80000000;
        auVar716._36_4_ = 0x80000000;
        auVar716._40_4_ = 0x80000000;
        auVar716._44_4_ = 0x80000000;
        auVar716._48_4_ = 0x80000000;
        auVar716._52_4_ = 0x80000000;
        auVar716._56_4_ = 0x80000000;
        auVar716._60_4_ = 0x80000000;
        auVar712 = vpternlogd_avx512f(auVar712,auVar730,auVar716,0xf8);
        auVar1755 = ZEXT1664(ZEXT816(0) << 0x40);
        uVar46 = vcmpps_avx512f(auVar712,auVar1755,1);
        auVar712 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar717._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar712._4_4_;
        auVar717._0_4_ = (uint)((byte)uVar46 & 1) * auVar712._0_4_;
        auVar717._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar712._8_4_;
        auVar717._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar712._12_4_;
        auVar717._16_4_ = (uint)((byte)(uVar46 >> 4) & 1) * auVar712._16_4_;
        auVar717._20_4_ = (uint)((byte)(uVar46 >> 5) & 1) * auVar712._20_4_;
        auVar717._24_4_ = (uint)((byte)(uVar46 >> 6) & 1) * auVar712._24_4_;
        auVar717._28_4_ = (uint)((byte)(uVar46 >> 7) & 1) * auVar712._28_4_;
        auVar717._32_4_ = (uint)((byte)(uVar46 >> 8) & 1) * auVar712._32_4_;
        auVar717._36_4_ = (uint)((byte)(uVar46 >> 9) & 1) * auVar712._36_4_;
        auVar717._40_4_ = (uint)((byte)(uVar46 >> 10) & 1) * auVar712._40_4_;
        auVar717._44_4_ = (uint)((byte)(uVar46 >> 0xb) & 1) * auVar712._44_4_;
        auVar717._48_4_ = (uint)((byte)(uVar46 >> 0xc) & 1) * auVar712._48_4_;
        auVar717._52_4_ = (uint)((byte)(uVar46 >> 0xd) & 1) * auVar712._52_4_;
        auVar717._56_4_ = (uint)((byte)(uVar46 >> 0xe) & 1) * auVar712._56_4_;
        auVar717._60_4_ = (uint)(byte)(uVar46 >> 0xf) * auVar712._60_4_;
        auVar712 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar713 = vdivps_avx512f(auVar712,auVar730);
        iVar421 = 3;
        uVar46 = vcmpps_avx512f(auVar730,auVar1755,1);
        uVar426 = vcmpps_avx512f(auVar730,auVar1755,4);
        auVar730 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar714 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar715 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar721 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar725 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar726 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        do {
          auVar492 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[2]));
          auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[3]));
          auVar516 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar504 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar671 = vinsertf32x4_avx512vl(ZEXT1632(auVar492),auVar493,1);
          auVar672 = vinsertf32x4_avx512vl(ZEXT1632(auVar516),auVar504,1);
          auVar732 = vinsertf64x4_avx512f(ZEXT3264(auVar672),auVar671,1);
          in_ZMM19 = vmulps_avx512f(auVar732,auVar713);
          uVar427 = vcmpps_avx512f(auVar732,auVar1755,1);
          auVar845 = vandps_avx512dq(in_ZMM19,auVar715);
          auVar336._8_4_ = 0xc0490fdb;
          auVar336._0_8_ = 0xc0490fdbc0490fdb;
          auVar336._12_4_ = 0xc0490fdb;
          auVar336._16_4_ = 0xc0490fdb;
          auVar336._20_4_ = 0xc0490fdb;
          auVar336._24_4_ = 0xc0490fdb;
          auVar336._28_4_ = 0xc0490fdb;
          auVar336._32_4_ = 0xc0490fdb;
          auVar336._36_4_ = 0xc0490fdb;
          auVar336._40_4_ = 0xc0490fdb;
          auVar336._44_4_ = 0xc0490fdb;
          auVar336._48_4_ = 0xc0490fdb;
          auVar336._52_4_ = 0xc0490fdb;
          auVar336._56_4_ = 0xc0490fdb;
          auVar336._60_4_ = 0xc0490fdb;
          auVar729 = vblendmps_avx512f(auVar714,auVar336);
          bVar11 = (bool)((byte)uVar427 & 1);
          in_ZMM21._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar504._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          in_ZMM21._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar504._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          in_ZMM21._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar504._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          in_ZMM21._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar504._12_4_;
          in_ZMM21._16_4_ = (uint)((byte)(uVar427 >> 4) & 1) * auVar729._16_4_;
          in_ZMM21._20_4_ = (uint)((byte)(uVar427 >> 5) & 1) * auVar729._20_4_;
          in_ZMM21._24_4_ = (uint)((byte)(uVar427 >> 6) & 1) * auVar729._24_4_;
          in_ZMM21._28_4_ = (uint)((byte)(uVar427 >> 7) & 1) * auVar729._28_4_;
          in_ZMM21._32_4_ = (uint)((byte)(uVar427 >> 8) & 1) * auVar729._32_4_;
          in_ZMM21._36_4_ = (uint)((byte)(uVar427 >> 9) & 1) * auVar729._36_4_;
          in_ZMM21._40_4_ = (uint)((byte)(uVar427 >> 10) & 1) * auVar729._40_4_;
          in_ZMM21._44_4_ = (uint)((byte)(uVar427 >> 0xb) & 1) * auVar729._44_4_;
          in_ZMM21._48_4_ = (uint)((byte)(uVar427 >> 0xc) & 1) * auVar729._48_4_;
          in_ZMM21._52_4_ = (uint)((byte)(uVar427 >> 0xd) & 1) * auVar729._52_4_;
          in_ZMM21._56_4_ = (uint)((byte)(uVar427 >> 0xe) & 1) * auVar729._56_4_;
          in_ZMM21._60_4_ = (uint)(byte)(uVar427 >> 0xf) * auVar729._60_4_;
          uVar427 = vcmpps_avx512f(auVar712,auVar845,1);
          auVar337._8_4_ = 0xbf800000;
          auVar337._0_8_ = 0xbf800000bf800000;
          auVar337._12_4_ = 0xbf800000;
          auVar337._16_4_ = 0xbf800000;
          auVar337._20_4_ = 0xbf800000;
          auVar337._24_4_ = 0xbf800000;
          auVar337._28_4_ = 0xbf800000;
          auVar337._32_4_ = 0xbf800000;
          auVar337._36_4_ = 0xbf800000;
          auVar337._40_4_ = 0xbf800000;
          auVar337._44_4_ = 0xbf800000;
          auVar337._48_4_ = 0xbf800000;
          auVar337._52_4_ = 0xbf800000;
          auVar337._56_4_ = 0xbf800000;
          auVar337._60_4_ = 0xbf800000;
          auVar729 = vblendmps_avx512f(auVar845,auVar337);
          bVar11 = (bool)((byte)uVar427 & 1);
          auVar811._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * in_ZMM22._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar811._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar811._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar811._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
          bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
          auVar811._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
          bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
          auVar811._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
          bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
          auVar811._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
          bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
          auVar811._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
          bVar28 = (byte)(uVar427 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar811._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * in_ZMM22._32_4_;
          bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
          auVar811._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * in_ZMM22._36_4_;
          bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
          auVar811._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * in_ZMM22._40_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
          auVar811._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * in_ZMM22._44_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
          auVar811._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * in_ZMM22._48_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
          auVar811._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * in_ZMM22._52_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
          auVar811._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * in_ZMM22._56_4_;
          bVar11 = SUB81(uVar427 >> 0xf,0);
          auVar811._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * in_ZMM22._60_4_;
          auVar845 = vmaxps_avx512f(auVar845,auVar712);
          auVar845 = vdivps_avx512f(auVar811,auVar845);
          in_ZMM22 = vmulps_avx512f(auVar845,auVar845);
          auVar729 = vmulps_avx512f(in_ZMM22,in_ZMM22);
          auVar727 = vfmadd213ps_avx512f(auVar716,auVar729,auVar718);
          auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar719);
          auVar728 = vfmadd213ps_avx512f(auVar721,auVar729,auVar722);
          auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar723);
          auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar724);
          auVar727 = vfmadd213ps_avx512f(auVar727,auVar729,auVar720);
          auVar729 = vfmadd213ps_avx512f(auVar728,auVar729,auVar712);
          auVar729 = vfmadd231ps_avx512f(auVar729,in_ZMM22,auVar727);
          auVar845 = vmulps_avx512f(auVar729,auVar845);
          uVar428 = vcmpps_avx512f(auVar732,auVar1755,4);
          auVar729 = vaddps_avx512f(auVar845,auVar725);
          bVar11 = (bool)((byte)uVar427 & 1);
          auVar812._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar812._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar845._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar812._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar845._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar812._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar845._12_4_;
          bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
          auVar812._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar845._16_4_;
          bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
          auVar812._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar845._20_4_;
          bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
          auVar812._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar845._24_4_;
          bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
          auVar812._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar845._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar812._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar845._32_4_;
          bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
          auVar812._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar845._36_4_;
          bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
          auVar812._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar845._40_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
          auVar812._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar845._44_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
          auVar812._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar845._48_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
          auVar812._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar845._52_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
          auVar812._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar845._56_4_;
          bVar11 = SUB81(uVar427 >> 0xf,0);
          auVar812._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar845._60_4_;
          auVar845 = vpternlogd_avx512f(auVar812,in_ZMM19,auVar730,0xf8);
          auVar729 = vaddps_avx512f(auVar845,in_ZMM21);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar13 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar14 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar15 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar16 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar17 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar18 = (bool)((byte)(uVar46 >> 6) & 1);
          bVar19 = (bool)((byte)(uVar46 >> 7) & 1);
          bVar20 = (bool)((byte)(uVar46 >> 8) & 1);
          bVar21 = (bool)((byte)(uVar46 >> 9) & 1);
          bVar22 = (bool)((byte)(uVar46 >> 10) & 1);
          bVar23 = (bool)((byte)(uVar46 >> 0xb) & 1);
          bVar24 = (bool)((byte)(uVar46 >> 0xc) & 1);
          bVar25 = (bool)((byte)(uVar46 >> 0xd) & 1);
          bVar26 = (bool)((byte)(uVar46 >> 0xe) & 1);
          bVar27 = SUB81(uVar46 >> 0xf,0);
          auVar732 = vpternlogd_avx512f(auVar732,auVar730,auVar726,0xea);
          bVar12 = (bool)((byte)uVar426 & 1);
          auVar813._0_4_ =
               (uint)bVar12 * ((uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_) |
               (uint)!bVar12 * auVar732._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar813._4_4_ =
               (uint)bVar11 * ((uint)bVar13 * auVar729._4_4_ | (uint)!bVar13 * auVar845._4_4_) |
               (uint)!bVar11 * auVar732._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar813._8_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar729._8_4_ | (uint)!bVar14 * auVar845._8_4_) |
               (uint)!bVar11 * auVar732._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar813._12_4_ =
               (uint)bVar11 * ((uint)bVar15 * auVar729._12_4_ | (uint)!bVar15 * auVar845._12_4_) |
               (uint)!bVar11 * auVar732._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar813._16_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar729._16_4_ | (uint)!bVar16 * auVar845._16_4_) |
               (uint)!bVar11 * auVar732._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar813._20_4_ =
               (uint)bVar11 * ((uint)bVar17 * auVar729._20_4_ | (uint)!bVar17 * auVar845._20_4_) |
               (uint)!bVar11 * auVar732._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar813._24_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar729._24_4_ | (uint)!bVar18 * auVar845._24_4_) |
               (uint)!bVar11 * auVar732._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar813._28_4_ =
               (uint)bVar11 * ((uint)bVar19 * auVar729._28_4_ | (uint)!bVar19 * auVar845._28_4_) |
               (uint)!bVar11 * auVar732._28_4_;
          bVar11 = (bool)((byte)(uVar426 >> 8) & 1);
          auVar813._32_4_ =
               (uint)bVar11 * ((uint)bVar20 * auVar729._32_4_ | (uint)!bVar20 * auVar845._32_4_) |
               (uint)!bVar11 * auVar732._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar813._36_4_ =
               (uint)bVar11 * ((uint)bVar21 * auVar729._36_4_ | (uint)!bVar21 * auVar845._36_4_) |
               (uint)!bVar11 * auVar732._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar813._40_4_ =
               (uint)bVar11 * ((uint)bVar22 * auVar729._40_4_ | (uint)!bVar22 * auVar845._40_4_) |
               (uint)!bVar11 * auVar732._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar813._44_4_ =
               (uint)bVar11 * ((uint)bVar23 * auVar729._44_4_ | (uint)!bVar23 * auVar845._44_4_) |
               (uint)!bVar11 * auVar732._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar813._48_4_ =
               (uint)bVar11 * ((uint)bVar24 * auVar729._48_4_ | (uint)!bVar24 * auVar845._48_4_) |
               (uint)!bVar11 * auVar732._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar813._52_4_ =
               (uint)bVar11 * ((uint)bVar25 * auVar729._52_4_ | (uint)!bVar25 * auVar845._52_4_) |
               (uint)!bVar11 * auVar732._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar813._56_4_ =
               (uint)bVar11 * ((uint)bVar26 * auVar729._56_4_ | (uint)!bVar26 * auVar845._56_4_) |
               (uint)!bVar11 * auVar732._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar813._60_4_ =
               (uint)bVar11 * ((uint)bVar27 * auVar729._60_4_ | (uint)!bVar27 * auVar845._60_4_) |
               (uint)!bVar11 * auVar732._60_4_;
          auVar732 = vblendmps_avx512f(auVar717,auVar813);
          bVar11 = (bool)((byte)uVar428 & 1);
          bVar12 = (bool)((byte)(uVar428 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar428 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar428 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar428 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar428 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar428 >> 6) & 1);
          bVar18 = (bool)((byte)(uVar428 >> 7) & 1);
          bVar19 = (bool)((byte)(uVar428 >> 8) & 1);
          bVar20 = (bool)((byte)(uVar428 >> 9) & 1);
          bVar21 = (bool)((byte)(uVar428 >> 10) & 1);
          bVar22 = (bool)((byte)(uVar428 >> 0xb) & 1);
          bVar23 = (bool)((byte)(uVar428 >> 0xc) & 1);
          bVar24 = (bool)((byte)(uVar428 >> 0xd) & 1);
          bVar25 = (bool)((byte)(uVar428 >> 0xe) & 1);
          bVar26 = SUB81(uVar428 >> 0xf,0);
          *(uint *)*(undefined1 (*) [32])outptr =
               (uint)bVar11 * auVar732._0_4_ | !bVar11 * auVar813._0_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 4) =
               (uint)bVar12 * auVar732._4_4_ | !bVar12 * auVar813._4_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 8) =
               (uint)bVar13 * auVar732._8_4_ | !bVar13 * auVar813._8_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0xc) =
               (uint)bVar14 * auVar732._12_4_ | !bVar14 * auVar813._12_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x10) =
               (uint)bVar15 * auVar732._16_4_ | !bVar15 * auVar813._16_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x14) =
               (uint)bVar16 * auVar732._20_4_ | !bVar16 * auVar813._20_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x18) =
               (uint)bVar17 * auVar732._24_4_ | !bVar17 * auVar813._24_4_;
          *(uint *)((long)*(undefined1 (*) [32])outptr + 0x1c) =
               (uint)bVar18 * auVar732._28_4_ | !bVar18 * auVar813._28_4_;
          *(uint *)*(undefined1 (*) [32])((long)outptr + 0x20) =
               (uint)bVar19 * auVar732._32_4_ | !bVar19 * auVar813._32_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 4) =
               (uint)bVar20 * auVar732._36_4_ | !bVar20 * auVar813._36_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 8) =
               (uint)bVar21 * auVar732._40_4_ | !bVar21 * auVar813._40_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0xc) =
               (uint)bVar22 * auVar732._44_4_ | !bVar22 * auVar813._44_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x10) =
               (uint)bVar23 * auVar732._48_4_ | !bVar23 * auVar813._48_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x14) =
               (uint)bVar24 * auVar732._52_4_ | !bVar24 * auVar813._52_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x18) =
               (uint)bVar25 * auVar732._56_4_ | !bVar25 * auVar813._56_4_;
          *(uint *)((long)*(undefined1 (*) [32])((long)outptr + 0x20) + 0x1c) =
               (uint)bVar26 * auVar732._60_4_ | !bVar26 * auVar813._60_4_;
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      if ((int)(uVar424 | 1) < (int)uVar422) {
        auVar984._8_4_ = 0x40490fdb;
        auVar984._0_8_ = 0x40490fdb40490fdb;
        auVar984._12_4_ = 0x40490fdb;
        auVar984._16_4_ = 0x40490fdb;
        auVar984._20_4_ = 0x40490fdb;
        auVar984._24_4_ = 0x40490fdb;
        auVar984._28_4_ = 0x40490fdb;
        auVar1243._8_4_ = 0x80000000;
        auVar1243._0_8_ = 0x8000000080000000;
        auVar1243._12_4_ = 0x80000000;
        auVar1243._16_4_ = 0x80000000;
        auVar1243._20_4_ = 0x80000000;
        auVar1243._24_4_ = 0x80000000;
        auVar1243._28_4_ = 0x80000000;
        auVar672 = vpternlogd_avx512vl(auVar1243,auVar910,auVar984,0xea);
        auVar1049._8_4_ = 0x3f800000;
        auVar1049._0_8_ = 0x3f8000003f800000;
        auVar1049._12_4_ = 0x3f800000;
        auVar1049._16_4_ = 0x3f800000;
        auVar1049._20_4_ = 0x3f800000;
        auVar1049._24_4_ = 0x3f800000;
        auVar1049._28_4_ = 0x3f800000;
        auVar671 = vdivps_avx(auVar1049,auVar910);
        auVar492 = ZEXT816(0) << 0x40;
        uVar45 = vcmpps_avx512vl(ZEXT1632(auVar492),auVar672,2);
        uVar46 = vcmpps_avx512vl(auVar910,ZEXT1632(auVar492),1);
        auVar1244._8_4_ = 0x80000000;
        auVar1244._0_8_ = 0x8000000080000000;
        auVar1244._12_4_ = 0x80000000;
        auVar1244._16_4_ = 0x80000000;
        auVar1244._20_4_ = 0x80000000;
        auVar1244._24_4_ = 0x80000000;
        auVar1244._28_4_ = 0x80000000;
        auVar1303._8_4_ = 0x40490fdb;
        auVar1303._0_8_ = 0x40490fdb40490fdb;
        auVar1303._12_4_ = 0x40490fdb;
        auVar1303._16_4_ = 0x40490fdb;
        auVar1303._20_4_ = 0x40490fdb;
        auVar1303._24_4_ = 0x40490fdb;
        auVar1303._28_4_ = 0x40490fdb;
        auVar1361._8_4_ = 0x7fffffff;
        auVar1361._0_8_ = 0x7fffffff7fffffff;
        auVar1361._12_4_ = 0x7fffffff;
        auVar1361._16_4_ = 0x7fffffff;
        auVar1361._20_4_ = 0x7fffffff;
        auVar1361._24_4_ = 0x7fffffff;
        auVar1361._28_4_ = 0x7fffffff;
        auVar1417._8_4_ = 0xbc83a25c;
        auVar1417._0_8_ = 0xbc83a25cbc83a25c;
        auVar1417._12_4_ = 0xbc83a25c;
        auVar1417._16_4_ = 0xbc83a25c;
        auVar1417._20_4_ = 0xbc83a25c;
        auVar1417._24_4_ = 0xbc83a25c;
        auVar1417._28_4_ = 0xbc83a25c;
        auVar1471._8_4_ = 0xbd99b01e;
        auVar1471._0_8_ = 0xbd99b01ebd99b01e;
        auVar1471._12_4_ = 0xbd99b01e;
        auVar1471._16_4_ = 0xbd99b01e;
        auVar1471._20_4_ = 0xbd99b01e;
        auVar1471._24_4_ = 0xbd99b01e;
        auVar1471._28_4_ = 0xbd99b01e;
        auVar1525._8_4_ = 0xbe117200;
        auVar1525._0_8_ = 0xbe117200be117200;
        auVar1525._12_4_ = 0xbe117200;
        auVar1525._16_4_ = 0xbe117200;
        auVar1525._20_4_ = 0xbe117200;
        auVar1525._24_4_ = 0xbe117200;
        auVar1525._28_4_ = 0xbe117200;
        auVar1579._8_4_ = 0xbeaaaa53;
        auVar1579._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1579._12_4_ = 0xbeaaaa53;
        auVar1579._16_4_ = 0xbeaaaa53;
        auVar1579._20_4_ = 0xbeaaaa53;
        auVar1579._24_4_ = 0xbeaaaa53;
        auVar1579._28_4_ = 0xbeaaaa53;
        auVar1633._8_4_ = 0x3b3ac537;
        auVar1633._0_8_ = 0x3b3ac5373b3ac537;
        auVar1633._12_4_ = 0x3b3ac537;
        auVar1633._16_4_ = 0x3b3ac537;
        auVar1633._20_4_ = 0x3b3ac537;
        auVar1633._24_4_ = 0x3b3ac537;
        auVar1633._28_4_ = 0x3b3ac537;
        auVar1687._8_4_ = 0x3d2edd4e;
        auVar1687._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1687._12_4_ = 0x3d2edd4e;
        auVar1687._16_4_ = 0x3d2edd4e;
        auVar1687._20_4_ = 0x3d2edd4e;
        auVar1687._24_4_ = 0x3d2edd4e;
        auVar1687._28_4_ = 0x3d2edd4e;
        auVar1739._8_4_ = 0x3dd9ed24;
        auVar1739._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1739._12_4_ = 0x3dd9ed24;
        auVar1739._16_4_ = 0x3dd9ed24;
        auVar1739._20_4_ = 0x3dd9ed24;
        auVar1739._24_4_ = 0x3dd9ed24;
        auVar1739._28_4_ = 0x3dd9ed24;
        auVar1790._8_4_ = 0x3e4cb974;
        auVar1790._0_8_ = 0x3e4cb9743e4cb974;
        auVar1790._12_4_ = 0x3e4cb974;
        auVar1790._16_4_ = 0x3e4cb974;
        auVar1790._20_4_ = 0x3e4cb974;
        auVar1790._24_4_ = 0x3e4cb974;
        auVar1790._28_4_ = 0x3e4cb974;
        auVar672 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        uVar872 = uVar424;
        do {
          auVar493 = vbroadcastss_avx512vl(ZEXT416((uint)*ptr1));
          auVar516 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[1]));
          auVar684 = vinsertf32x4_avx512vl(ZEXT1632(auVar493),auVar516,1);
          auVar676 = vmulps_avx512vl(auVar684,auVar671);
          auVar682 = ZEXT1632(auVar492);
          uVar426 = vcmpps_avx512vl(auVar684,auVar682,1);
          vandps_avx512vl(auVar676,auVar1361);
          auVar181._8_4_ = 0xc0490fdb;
          auVar181._0_8_ = 0xc0490fdbc0490fdb;
          auVar181._12_4_ = 0xc0490fdb;
          auVar181._16_4_ = 0xc0490fdb;
          auVar181._20_4_ = 0xc0490fdb;
          auVar181._24_4_ = 0xc0490fdb;
          auVar181._28_4_ = 0xc0490fdb;
          auVar677 = vblendmps_avx512vl(auVar1303,auVar181);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar633._0_4_ = (uint)bVar11 * auVar677._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar633._4_4_ = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar633._8_4_ = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar633._12_4_ = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar633._16_4_ = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar633._20_4_ = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar633._24_4_ = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar633._28_4_ = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
          in_ZMM21 = ZEXT3264(auVar633);
          uVar426 = vcmpps_avx512vl(auVar1049,auVar676,1);
          auVar182._8_4_ = 0xbf800000;
          auVar182._0_8_ = 0xbf800000bf800000;
          auVar182._12_4_ = 0xbf800000;
          auVar182._16_4_ = 0xbf800000;
          auVar182._20_4_ = 0xbf800000;
          auVar182._24_4_ = 0xbf800000;
          auVar182._28_4_ = 0xbf800000;
          auVar677 = vblendmps_avx512vl(auVar676,auVar182);
          bVar28 = (byte)uVar426;
          auVar634._0_4_ =
               (uint)(bVar28 & 1) * auVar677._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar634._4_4_ = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar634._8_4_ = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar634._12_4_ = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar634._16_4_ = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar634._20_4_ = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar634._24_4_ = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar634._28_4_ = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
          auVar677 = vdivps_avx512vl(auVar634,auVar676);
          auVar635._0_4_ =
               (uint)(bVar28 & 1) * auVar677._0_4_ | !(bool)(bVar28 & 1) * auVar634._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar635._4_4_ = (uint)bVar11 * auVar677._4_4_ | !bVar11 * auVar634._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar635._8_4_ = (uint)bVar11 * auVar677._8_4_ | !bVar11 * auVar634._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar635._12_4_ = (uint)bVar11 * auVar677._12_4_ | !bVar11 * auVar634._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar635._16_4_ = (uint)bVar11 * auVar677._16_4_ | !bVar11 * auVar634._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar635._20_4_ = (uint)bVar11 * auVar677._20_4_ | !bVar11 * auVar634._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar635._24_4_ = (uint)bVar11 * auVar677._24_4_ | !bVar11 * auVar634._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar635._28_4_ = (uint)bVar11 * auVar677._28_4_ | !bVar11 * auVar634._28_4_;
          in_ZMM22 = ZEXT3264(auVar635);
          uVar427 = vcmpps_avx512vl(auVar684,auVar682,4);
          auVar677 = vmulps_avx512vl(auVar635,auVar635);
          vandps_avx512vl(auVar684,auVar1244);
          auVar684 = vmulps_avx512vl(auVar677,auVar677);
          auVar680 = vfmadd213ps_avx512vl(auVar1417,auVar684,auVar1471);
          auVar680 = vfmadd213ps_avx512vl(auVar680,auVar684,auVar1525);
          auVar681 = vfmadd213ps_avx512vl(auVar1633,auVar684,auVar1687);
          auVar681 = vfmadd213ps_avx512vl(auVar681,auVar684,auVar1739);
          auVar680 = vfmadd213ps_avx512vl(auVar680,auVar684,auVar1579);
          auVar681 = vfmadd213ps_avx512vl(auVar681,auVar684,auVar1790);
          auVar684 = vfmadd213ps_avx512vl(auVar681,auVar684,auVar1049);
          auVar684 = vfmadd231ps_avx512vl(auVar684,auVar677,auVar680);
          uVar428 = vcmpps_avx512vl(auVar910,auVar682,4);
          uVar428 = uVar427 & uVar428;
          auVar684 = vmulps_avx512vl(auVar684,auVar635);
          auVar680 = vaddps_avx512vl(auVar684,auVar672);
          auVar636._0_4_ =
               (uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar684._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar636._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * auVar684._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar636._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * auVar684._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar636._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * auVar684._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar636._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * auVar684._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar636._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * auVar684._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar636._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * auVar684._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar636._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * auVar684._28_4_;
          auVar684 = vpternlogd_avx512vl(auVar636,auVar676,auVar1244,0xf8);
          auVar676 = vaddps_avx512vl(auVar684,auVar633);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar13 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar46 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar46 >> 4) & 1);
          bVar21 = (bool)((byte)(uVar46 >> 5) & 1);
          bVar23 = (bool)((byte)(uVar46 >> 6) & 1);
          bVar25 = SUB81(uVar46 >> 7,0);
          auVar677 = vorps_avx512vl(auVar677,auVar675);
          auVar637._4_4_ = (uint)((byte)(uVar427 >> 1) & 1) * auVar677._4_4_;
          auVar637._0_4_ = (uint)((byte)uVar427 & 1) * auVar677._0_4_;
          auVar637._8_4_ = (uint)((byte)(uVar427 >> 2) & 1) * auVar677._8_4_;
          auVar637._12_4_ = (uint)((byte)(uVar427 >> 3) & 1) * auVar677._12_4_;
          auVar637._16_4_ = (uint)((byte)(uVar427 >> 4) & 1) * auVar677._16_4_;
          auVar637._20_4_ = (uint)((byte)(uVar427 >> 5) & 1) * auVar677._20_4_;
          auVar637._24_4_ = (uint)((byte)(uVar427 >> 6) & 1) * auVar677._24_4_;
          auVar637._28_4_ = (uint)(byte)(uVar427 >> 7) * auVar677._28_4_;
          bVar28 = (byte)uVar427 | (byte)uVar45;
          auVar677 = vorps_avx512vl(auVar637,auVar984);
          auVar680 = vmovdqa32_avx512vl(auVar637);
          bVar14 = (bool)(bVar28 >> 1 & 1);
          bVar16 = (bool)(bVar28 >> 2 & 1);
          bVar18 = (bool)(bVar28 >> 3 & 1);
          bVar20 = (bool)(bVar28 >> 4 & 1);
          bVar22 = (bool)(bVar28 >> 5 & 1);
          bVar24 = (bool)(bVar28 >> 6 & 1);
          bVar12 = (bool)((byte)uVar428 & 1);
          auVar638._0_4_ =
               (uint)bVar12 * ((uint)bVar11 * auVar676._0_4_ | (uint)!bVar11 * auVar684._0_4_) |
               (uint)!bVar12 *
               ((uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar677._0_4_);
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          auVar638._4_4_ =
               (uint)bVar11 * ((uint)bVar13 * auVar676._4_4_ | (uint)!bVar13 * auVar684._4_4_) |
               (uint)!bVar11 * ((uint)bVar14 * auVar680._4_4_ | (uint)!bVar14 * auVar677._4_4_);
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          auVar638._8_4_ =
               (uint)bVar11 * ((uint)bVar15 * auVar676._8_4_ | (uint)!bVar15 * auVar684._8_4_) |
               (uint)!bVar11 * ((uint)bVar16 * auVar680._8_4_ | (uint)!bVar16 * auVar677._8_4_);
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar638._12_4_ =
               (uint)bVar11 * ((uint)bVar17 * auVar676._12_4_ | (uint)!bVar17 * auVar684._12_4_) |
               (uint)!bVar11 * ((uint)bVar18 * auVar680._12_4_ | (uint)!bVar18 * auVar677._12_4_);
          bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
          auVar638._16_4_ =
               (uint)bVar11 * ((uint)bVar19 * auVar676._16_4_ | (uint)!bVar19 * auVar684._16_4_) |
               (uint)!bVar11 * ((uint)bVar20 * auVar680._16_4_ | (uint)!bVar20 * auVar677._16_4_);
          bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
          auVar638._20_4_ =
               (uint)bVar11 * ((uint)bVar21 * auVar676._20_4_ | (uint)!bVar21 * auVar684._20_4_) |
               (uint)!bVar11 * ((uint)bVar22 * auVar680._20_4_ | (uint)!bVar22 * auVar677._20_4_);
          bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
          auVar638._24_4_ =
               (uint)bVar11 * ((uint)bVar23 * auVar676._24_4_ | (uint)!bVar23 * auVar684._24_4_) |
               (uint)!bVar11 * ((uint)bVar24 * auVar680._24_4_ | (uint)!bVar24 * auVar677._24_4_);
          bVar11 = SUB81(uVar428 >> 7,0);
          auVar638._28_4_ =
               (uint)bVar11 * ((uint)bVar25 * auVar676._28_4_ | (uint)!bVar25 * auVar684._28_4_) |
               (uint)!bVar11 *
               ((uint)(bVar28 >> 7) * auVar680._28_4_ | (uint)!(bool)(bVar28 >> 7) * auVar677._28_4_
               );
          in_ZMM19 = ZEXT3264(auVar638);
          *(undefined1 (*) [32])outptr = auVar638;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x20);
          uVar424 = uVar872 + 2;
          iVar421 = uVar872 + 3;
          uVar872 = uVar424;
        } while (iVar421 < (int)uVar422);
      }
      if ((int)uVar422 <= (int)uVar424) {
        return;
      }
      auVar436._8_4_ = 0x40490fdb;
      auVar436._0_8_ = 0x40490fdb40490fdb;
      auVar436._12_4_ = 0x40490fdb;
      auVar1218._8_4_ = 0x80000000;
      auVar1218._0_8_ = 0x8000000080000000;
      auVar1218._12_4_ = 0x80000000;
      auVar437._8_4_ = 0x3f800000;
      auVar437._0_8_ = 0x3f8000003f800000;
      auVar437._12_4_ = 0x3f800000;
      auVar493 = vpternlogd_avx512vl(auVar1218,auVar462,auVar436,0xea);
      auVar492 = vdivps_avx(auVar437,auVar462);
      lVar425 = 0;
      auVar504 = ZEXT816(0) << 0x40;
      uVar45 = vcmpps_avx512vl(auVar504,auVar493,2);
      uVar46 = vcmpps_avx512vl(auVar462,auVar504,1);
      auVar1219._8_4_ = 0x80000000;
      auVar1219._0_8_ = 0x8000000080000000;
      auVar1219._12_4_ = 0x80000000;
      auVar1284._8_4_ = 0x40490fdb;
      auVar1284._0_8_ = 0x40490fdb40490fdb;
      auVar1284._12_4_ = 0x40490fdb;
      auVar1343._8_4_ = 0x7fffffff;
      auVar1343._0_8_ = 0x7fffffff7fffffff;
      auVar1343._12_4_ = 0x7fffffff;
      auVar1399._8_4_ = 0xbc83a25c;
      auVar1399._0_8_ = 0xbc83a25cbc83a25c;
      auVar1399._12_4_ = 0xbc83a25c;
      auVar1453._8_4_ = 0xbd99b01e;
      auVar1453._0_8_ = 0xbd99b01ebd99b01e;
      auVar1453._12_4_ = 0xbd99b01e;
      auVar1507._8_4_ = 0xbe117200;
      auVar1507._0_8_ = 0xbe117200be117200;
      auVar1507._12_4_ = 0xbe117200;
      auVar1561._8_4_ = 0xbeaaaa53;
      auVar1561._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1561._12_4_ = 0xbeaaaa53;
      auVar1615._8_4_ = 0x3b3ac537;
      auVar1615._0_8_ = 0x3b3ac5373b3ac537;
      auVar1615._12_4_ = 0x3b3ac537;
      auVar1669._8_4_ = 0x3d2edd4e;
      auVar1669._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1669._12_4_ = 0x3d2edd4e;
      auVar1723._8_4_ = 0x3dd9ed24;
      auVar1723._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1723._12_4_ = 0x3dd9ed24;
      auVar1774._8_4_ = 0x3e4cb974;
      auVar1774._0_8_ = 0x3e4cb9743e4cb974;
      auVar1774._12_4_ = 0x3e4cb974;
      auVar493 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      auVar516 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      do {
        auVar496 = vbroadcastss_avx512vl(ZEXT416((uint)ptr1[lVar425]));
        uVar426 = vcmpps_avx512vl(auVar496,auVar504,1);
        auVar57._8_4_ = 0xc0490fdb;
        auVar57._0_8_ = 0xc0490fdbc0490fdb;
        auVar57._12_4_ = 0xc0490fdb;
        auVar497 = vblendmps_avx512vl(auVar1284,auVar57);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar534._0_4_ = (uint)bVar11 * auVar497._0_4_ | (uint)!bVar11 * in_ZMM19._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar534._4_4_ = (uint)bVar11 * auVar497._4_4_ | (uint)!bVar11 * in_ZMM19._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar534._8_4_ = (uint)bVar11 * auVar497._8_4_ | (uint)!bVar11 * in_ZMM19._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar534._12_4_ = (uint)bVar11 * auVar497._12_4_ | (uint)!bVar11 * in_ZMM19._12_4_;
        auVar497 = vmulps_avx512vl(auVar496,auVar492);
        auVar498 = vandps_avx512vl(auVar497,auVar1343);
        uVar426 = vcmpps_avx512vl(auVar437,auVar498,1);
        auVar58._8_4_ = 0xbf800000;
        auVar58._0_8_ = 0xbf800000bf800000;
        auVar58._12_4_ = 0xbf800000;
        auVar501 = vblendmps_avx512vl(auVar498,auVar58);
        bVar28 = (byte)uVar426;
        auVar535._0_4_ =
             (uint)(bVar28 & 1) * auVar501._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar535._4_4_ = (uint)bVar11 * auVar501._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar535._8_4_ = (uint)bVar11 * auVar501._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar535._12_4_ = (uint)bVar11 * auVar501._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
        uVar427 = vcmpps_avx512vl(auVar496,auVar504,4);
        auVar498 = vdivps_avx512vl(auVar535,auVar498);
        auVar536._0_4_ = (uint)(bVar28 & 1) * auVar498._0_4_ | !(bool)(bVar28 & 1) * auVar535._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar536._4_4_ = (uint)bVar11 * auVar498._4_4_ | !bVar11 * auVar535._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar536._8_4_ = (uint)bVar11 * auVar498._8_4_ | !bVar11 * auVar535._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar536._12_4_ = (uint)bVar11 * auVar498._12_4_ | !bVar11 * auVar535._12_4_;
        in_ZMM22 = ZEXT1664(auVar536);
        auVar498 = vmulps_avx512vl(auVar536,auVar536);
        auVar501 = vmulps_avx512vl(auVar498,auVar498);
        auVar496 = vandps_avx512vl(auVar496,auVar1219);
        auVar502 = vfmadd213ps_avx512vl(auVar1399,auVar501,auVar1453);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar501,auVar1507);
        auVar520 = vfmadd213ps_avx512vl(auVar1615,auVar501,auVar1669);
        auVar520 = vfmadd213ps_avx512vl(auVar520,auVar501,auVar1723);
        auVar520 = vfmadd213ps_avx512vl(auVar520,auVar501,auVar1774);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar501,auVar1561);
        auVar501 = vfmadd213ps_avx512vl(auVar520,auVar501,auVar437);
        auVar498 = vfmadd231ps_avx512vl(auVar501,auVar498,auVar502);
        auVar498 = vmulps_avx512vl(auVar498,auVar536);
        uVar428 = vcmpps_avx512vl(auVar462,auVar504,4);
        uVar428 = uVar427 & uVar428;
        auVar501 = vaddps_avx512vl(auVar498,auVar493);
        auVar537._0_4_ =
             (uint)(bVar28 & 1) * auVar501._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar498._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar537._4_4_ = (uint)bVar11 * auVar501._4_4_ | (uint)!bVar11 * auVar498._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar537._8_4_ = (uint)bVar11 * auVar501._8_4_ | (uint)!bVar11 * auVar498._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar537._12_4_ = (uint)bVar11 * auVar501._12_4_ | (uint)!bVar11 * auVar498._12_4_;
        auVar497 = vpternlogd_avx512vl(auVar537,auVar497,auVar1219,0xf8);
        auVar496 = vorps_avx512vl(auVar496,auVar516);
        auVar538._4_4_ = (uint)((byte)(uVar427 >> 1) & 1) * auVar496._4_4_;
        auVar538._0_4_ = (uint)((byte)uVar427 & 1) * auVar496._0_4_;
        auVar538._8_4_ = (uint)((byte)(uVar427 >> 2) & 1) * auVar496._8_4_;
        auVar538._12_4_ = (uint)((byte)(uVar427 >> 3) & 1) * auVar496._12_4_;
        auVar496 = vaddps_avx512vl(auVar497,auVar534);
        bVar11 = (bool)((byte)uVar46 & 1);
        bVar14 = (bool)((byte)(uVar46 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar46 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar46 >> 3) & 1);
        uVar47 = (ushort)uVar427 | (ushort)uVar45;
        auVar498 = vorps_avx512vl(auVar538,auVar436);
        auVar501 = vmovdqa32_avx512vl(auVar538);
        bVar12 = (bool)((byte)uVar47 & 1);
        bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar47 >> 2) & 1);
        bVar19 = (bool)((byte)(uVar47 >> 3) & 1);
        bVar13 = (bool)((byte)uVar428 & 1);
        auVar539._0_4_ =
             (uint)bVar13 * ((uint)bVar11 * auVar496._0_4_ | (uint)!bVar11 * auVar497._0_4_) |
             (uint)!bVar13 * ((uint)bVar12 * auVar501._0_4_ | (uint)!bVar12 * auVar498._0_4_);
        bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
        auVar539._4_4_ =
             (uint)bVar11 * ((uint)bVar14 * auVar496._4_4_ | (uint)!bVar14 * auVar497._4_4_) |
             (uint)!bVar11 * ((uint)bVar15 * auVar501._4_4_ | (uint)!bVar15 * auVar498._4_4_);
        bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
        auVar539._8_4_ =
             (uint)bVar11 * ((uint)bVar16 * auVar496._8_4_ | (uint)!bVar16 * auVar497._8_4_) |
             (uint)!bVar11 * ((uint)bVar17 * auVar501._8_4_ | (uint)!bVar17 * auVar498._8_4_);
        bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
        auVar539._12_4_ =
             (uint)bVar11 * ((uint)bVar18 * auVar496._12_4_ | (uint)!bVar18 * auVar497._12_4_) |
             (uint)!bVar11 * ((uint)bVar19 * auVar501._12_4_ | (uint)!bVar19 * auVar498._12_4_);
        in_ZMM19 = ZEXT1664(auVar539);
        *(undefined1 (*) [16])*(undefined1 (*) [32])outptr = auVar539;
        outptr = (float *)((long)*(undefined1 (*) [32])outptr + 0x10);
        lVar425 = lVar425 + 1;
      } while (uVar422 - uVar424 != (int)lVar425);
      return;
    }
    if (aw == bw) {
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        iVar421 = 0xf;
        auVar712 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar713 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        auVar725 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar1755 = ZEXT864(0);
        auVar726 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        auVar730 = in_ZMM20;
        do {
          auVar732 = *(undefined1 (*) [64])ptr;
          auVar845 = *(undefined1 (*) [64])ptr1;
          auVar727 = vdivps_avx512f(auVar845,auVar732);
          uVar46 = vcmpps_avx512f(auVar845,auVar1755,1);
          auVar728 = vandps_avx512dq(auVar727,auVar714);
          auVar729._8_4_ = 0xc0490fdb;
          auVar729._0_8_ = 0xc0490fdbc0490fdb;
          auVar729._12_4_ = 0xc0490fdb;
          auVar729._16_4_ = 0xc0490fdb;
          auVar729._20_4_ = 0xc0490fdb;
          auVar729._24_4_ = 0xc0490fdb;
          auVar729._28_4_ = 0xc0490fdb;
          auVar729._32_4_ = 0xc0490fdb;
          auVar729._36_4_ = 0xc0490fdb;
          auVar729._40_4_ = 0xc0490fdb;
          auVar729._44_4_ = 0xc0490fdb;
          auVar729._48_4_ = 0xc0490fdb;
          auVar729._52_4_ = 0xc0490fdb;
          auVar729._56_4_ = 0xc0490fdb;
          auVar729._60_4_ = 0xc0490fdb;
          auVar729 = vblendmps_avx512f(auVar713,auVar729);
          bVar11 = (bool)((byte)uVar46 & 1);
          in_ZMM20._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          in_ZMM20._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          in_ZMM20._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          in_ZMM20._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          in_ZMM20._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          in_ZMM20._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          in_ZMM20._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          in_ZMM20._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          in_ZMM20._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          in_ZMM20._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          in_ZMM20._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          in_ZMM20._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          in_ZMM20._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          in_ZMM20._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          in_ZMM20._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          in_ZMM20._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
          uVar46 = vcmpps_avx512f(auVar715,auVar728,1);
          auVar730._8_4_ = 0xbf800000;
          auVar730._0_8_ = 0xbf800000bf800000;
          auVar730._12_4_ = 0xbf800000;
          auVar730._16_4_ = 0xbf800000;
          auVar730._20_4_ = 0xbf800000;
          auVar730._24_4_ = 0xbf800000;
          auVar730._28_4_ = 0xbf800000;
          auVar730._32_4_ = 0xbf800000;
          auVar730._36_4_ = 0xbf800000;
          auVar730._40_4_ = 0xbf800000;
          auVar730._44_4_ = 0xbf800000;
          auVar730._48_4_ = 0xbf800000;
          auVar730._52_4_ = 0xbf800000;
          auVar730._56_4_ = 0xbf800000;
          auVar730._60_4_ = 0xbf800000;
          auVar730 = vblendmps_avx512f(auVar728,auVar730);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar731._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar731._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar731._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar731._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar731._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar731._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar731._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar731._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
          bVar28 = (byte)(uVar46 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar731._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * in_ZMM21._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar731._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * in_ZMM21._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar731._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * in_ZMM21._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar731._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * in_ZMM21._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar731._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * in_ZMM21._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar731._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * in_ZMM21._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar731._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * in_ZMM21._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar731._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * in_ZMM21._60_4_;
          auVar730 = vmaxps_avx512f(auVar728,auVar715);
          auVar730 = vdivps_avx512f(auVar731,auVar730);
          uVar426 = vcmpps_avx512f(auVar732,auVar1755,4);
          in_ZMM21 = vmulps_avx512f(auVar730,auVar730);
          uVar427 = vcmpps_avx512f(auVar845,auVar1755,4);
          auVar729 = vmulps_avx512f(in_ZMM21,in_ZMM21);
          auVar728 = vfmadd213ps_avx512f(auVar716,auVar729,auVar717);
          auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar718);
          auVar731 = vfmadd213ps_avx512f(auVar720,auVar729,auVar721);
          auVar731 = vfmadd213ps_avx512f(auVar731,auVar729,auVar722);
          auVar728 = vfmadd213ps_avx512f(auVar728,auVar729,auVar719);
          auVar731 = vfmadd213ps_avx512f(auVar731,auVar729,auVar723);
          auVar729 = vfmadd213ps_avx512f(auVar731,auVar729,auVar715);
          auVar729 = vfmadd231ps_avx512f(auVar729,in_ZMM21,auVar728);
          uVar428 = vcmpps_avx512f(auVar732,auVar1755,1);
          auVar730 = vmulps_avx512f(auVar729,auVar730);
          auVar729 = vaddps_avx512f(auVar730,auVar724);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar728._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar728._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar728._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar728._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar728._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar728._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar728._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          auVar728._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar728._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          auVar728._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          auVar728._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          auVar728._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          auVar728._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          auVar728._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          auVar728._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          auVar728._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
          auVar730 = vpternlogd_avx512f(auVar728,auVar727,auVar712,0xf8);
          auVar729 = vaddps_avx512f(auVar730,in_ZMM20);
          bVar11 = (bool)((byte)uVar428 & 1);
          bVar14 = (bool)((byte)(uVar428 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar428 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar428 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar428 >> 4) & 1);
          bVar22 = (bool)((byte)(uVar428 >> 5) & 1);
          bVar24 = (bool)((byte)(uVar428 >> 6) & 1);
          bVar26 = (bool)((byte)(uVar428 >> 7) & 1);
          bVar29 = (bool)((byte)(uVar428 >> 8) & 1);
          bVar31 = (bool)((byte)(uVar428 >> 9) & 1);
          bVar33 = (bool)((byte)(uVar428 >> 10) & 1);
          bVar35 = (bool)((byte)(uVar428 >> 0xb) & 1);
          bVar37 = (bool)((byte)(uVar428 >> 0xc) & 1);
          bVar39 = (bool)((byte)(uVar428 >> 0xd) & 1);
          bVar41 = (bool)((byte)(uVar428 >> 0xe) & 1);
          bVar43 = SUB81(uVar428 >> 0xf,0);
          auVar732 = vpternlogd_avx512f(auVar732,auVar712,auVar725,0xea);
          uVar46 = vcmpps_avx512f(auVar732,auVar1755,1);
          auVar732 = vpternlogd_avx512f(auVar845,auVar712,auVar726,0xea);
          bVar12 = (bool)((byte)uVar426 & 1);
          bVar15 = (bool)((byte)(uVar426 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar426 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar426 >> 3) & 1);
          bVar21 = (bool)((byte)(uVar426 >> 4) & 1);
          bVar23 = (bool)((byte)(uVar426 >> 5) & 1);
          bVar25 = (bool)((byte)(uVar426 >> 6) & 1);
          bVar27 = (bool)((byte)(uVar426 >> 7) & 1);
          bVar30 = (bool)((byte)(uVar426 >> 8) & 1);
          bVar32 = (bool)((byte)(uVar426 >> 9) & 1);
          bVar34 = (bool)((byte)(uVar426 >> 10) & 1);
          bVar36 = (bool)((byte)(uVar426 >> 0xb) & 1);
          bVar38 = (bool)((byte)(uVar426 >> 0xc) & 1);
          bVar40 = (bool)((byte)(uVar426 >> 0xd) & 1);
          bVar42 = (bool)((byte)(uVar426 >> 0xe) & 1);
          bVar44 = SUB81(uVar426 >> 0xf,0);
          bVar13 = (bool)((byte)uVar427 & 1);
          auVar845._0_4_ =
               (uint)bVar13 *
               ((uint)bVar12 * ((uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_) |
               (uint)!bVar12 * auVar732._0_4_) |
               (uint)!bVar13 * (uint)((byte)uVar46 & 1) * auVar713._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar845._4_4_ =
               (uint)bVar11 *
               ((uint)bVar15 * ((uint)bVar14 * auVar729._4_4_ | (uint)!bVar14 * auVar730._4_4_) |
               (uint)!bVar15 * auVar732._4_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 1) & 1) * auVar713._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar845._8_4_ =
               (uint)bVar11 *
               ((uint)bVar17 * ((uint)bVar16 * auVar729._8_4_ | (uint)!bVar16 * auVar730._8_4_) |
               (uint)!bVar17 * auVar732._8_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 2) & 1) * auVar713._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar845._12_4_ =
               (uint)bVar11 *
               ((uint)bVar19 * ((uint)bVar18 * auVar729._12_4_ | (uint)!bVar18 * auVar730._12_4_) |
               (uint)!bVar19 * auVar732._12_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 3) & 1) * auVar713._12_4_;
          bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
          auVar845._16_4_ =
               (uint)bVar11 *
               ((uint)bVar21 * ((uint)bVar20 * auVar729._16_4_ | (uint)!bVar20 * auVar730._16_4_) |
               (uint)!bVar21 * auVar732._16_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 4) & 1) * auVar713._16_4_;
          bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
          auVar845._20_4_ =
               (uint)bVar11 *
               ((uint)bVar23 * ((uint)bVar22 * auVar729._20_4_ | (uint)!bVar22 * auVar730._20_4_) |
               (uint)!bVar23 * auVar732._20_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 5) & 1) * auVar713._20_4_;
          bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
          auVar845._24_4_ =
               (uint)bVar11 *
               ((uint)bVar25 * ((uint)bVar24 * auVar729._24_4_ | (uint)!bVar24 * auVar730._24_4_) |
               (uint)!bVar25 * auVar732._24_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 6) & 1) * auVar713._24_4_;
          bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
          auVar845._28_4_ =
               (uint)bVar11 *
               ((uint)bVar27 * ((uint)bVar26 * auVar729._28_4_ | (uint)!bVar26 * auVar730._28_4_) |
               (uint)!bVar27 * auVar732._28_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 7) & 1) * auVar713._28_4_;
          bVar11 = (bool)((byte)(uVar427 >> 8) & 1);
          auVar845._32_4_ =
               (uint)bVar11 *
               ((uint)bVar30 * ((uint)bVar29 * auVar729._32_4_ | (uint)!bVar29 * auVar730._32_4_) |
               (uint)!bVar30 * auVar732._32_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 8) & 1) * auVar713._32_4_;
          bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
          auVar845._36_4_ =
               (uint)bVar11 *
               ((uint)bVar32 * ((uint)bVar31 * auVar729._36_4_ | (uint)!bVar31 * auVar730._36_4_) |
               (uint)!bVar32 * auVar732._36_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 9) & 1) * auVar713._36_4_;
          bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
          auVar845._40_4_ =
               (uint)bVar11 *
               ((uint)bVar34 * ((uint)bVar33 * auVar729._40_4_ | (uint)!bVar33 * auVar730._40_4_) |
               (uint)!bVar34 * auVar732._40_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 10) & 1) * auVar713._40_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
          auVar845._44_4_ =
               (uint)bVar11 *
               ((uint)bVar36 * ((uint)bVar35 * auVar729._44_4_ | (uint)!bVar35 * auVar730._44_4_) |
               (uint)!bVar36 * auVar732._44_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xb) & 1) * auVar713._44_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
          auVar845._48_4_ =
               (uint)bVar11 *
               ((uint)bVar38 * ((uint)bVar37 * auVar729._48_4_ | (uint)!bVar37 * auVar730._48_4_) |
               (uint)!bVar38 * auVar732._48_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xc) & 1) * auVar713._48_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
          auVar845._52_4_ =
               (uint)bVar11 *
               ((uint)bVar40 * ((uint)bVar39 * auVar729._52_4_ | (uint)!bVar39 * auVar730._52_4_) |
               (uint)!bVar40 * auVar732._52_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xd) & 1) * auVar713._52_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
          auVar845._56_4_ =
               (uint)bVar11 *
               ((uint)bVar42 * ((uint)bVar41 * auVar729._56_4_ | (uint)!bVar41 * auVar730._56_4_) |
               (uint)!bVar42 * auVar732._56_4_) |
               (uint)!bVar11 * (uint)((byte)(uVar46 >> 0xe) & 1) * auVar713._56_4_;
          bVar11 = SUB81(uVar427 >> 0xf,0);
          auVar845._60_4_ =
               (uint)bVar11 *
               ((uint)bVar44 * ((uint)bVar43 * auVar729._60_4_ | (uint)!bVar43 * auVar730._60_4_) |
               (uint)!bVar44 * auVar732._60_4_) |
               (uint)!bVar11 * (uint)(byte)(uVar46 >> 0xf) * auVar713._60_4_;
          ptr = (float *)((long)ptr + 0x40);
          *(undefined1 (*) [64])outptr = auVar845;
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
          auVar730 = in_ZMM20;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      if ((int)(uVar422 | 7) < (int)uVar424) {
        auVar671._8_4_ = 0x80000000;
        auVar671._0_8_ = 0x8000000080000000;
        auVar671._12_4_ = 0x80000000;
        auVar671._16_4_ = 0x80000000;
        auVar671._20_4_ = 0x80000000;
        auVar671._24_4_ = 0x80000000;
        auVar671._28_4_ = 0x80000000;
        auVar672._8_4_ = 0x40490fdb;
        auVar672._0_8_ = 0x40490fdb40490fdb;
        auVar672._12_4_ = 0x40490fdb;
        auVar672._16_4_ = 0x40490fdb;
        auVar672._20_4_ = 0x40490fdb;
        auVar672._24_4_ = 0x40490fdb;
        auVar672._28_4_ = 0x40490fdb;
        auVar675._8_4_ = 0x7fffffff;
        auVar675._0_8_ = 0x7fffffff7fffffff;
        auVar675._12_4_ = 0x7fffffff;
        auVar675._16_4_ = 0x7fffffff;
        auVar675._20_4_ = 0x7fffffff;
        auVar675._24_4_ = 0x7fffffff;
        auVar675._28_4_ = 0x7fffffff;
        auVar684._8_4_ = 0x3f800000;
        auVar684._0_8_ = 0x3f8000003f800000;
        auVar684._12_4_ = 0x3f800000;
        auVar684._16_4_ = 0x3f800000;
        auVar684._20_4_ = 0x3f800000;
        auVar684._24_4_ = 0x3f800000;
        auVar684._28_4_ = 0x3f800000;
        auVar676._8_4_ = 0xbc83a25c;
        auVar676._0_8_ = 0xbc83a25cbc83a25c;
        auVar676._12_4_ = 0xbc83a25c;
        auVar676._16_4_ = 0xbc83a25c;
        auVar676._20_4_ = 0xbc83a25c;
        auVar676._24_4_ = 0xbc83a25c;
        auVar676._28_4_ = 0xbc83a25c;
        auVar677._8_4_ = 0xbd99b01e;
        auVar677._0_8_ = 0xbd99b01ebd99b01e;
        auVar677._12_4_ = 0xbd99b01e;
        auVar677._16_4_ = 0xbd99b01e;
        auVar677._20_4_ = 0xbd99b01e;
        auVar677._24_4_ = 0xbd99b01e;
        auVar677._28_4_ = 0xbd99b01e;
        auVar680._8_4_ = 0xbe117200;
        auVar680._0_8_ = 0xbe117200be117200;
        auVar680._12_4_ = 0xbe117200;
        auVar680._16_4_ = 0xbe117200;
        auVar680._20_4_ = 0xbe117200;
        auVar680._24_4_ = 0xbe117200;
        auVar680._28_4_ = 0xbe117200;
        auVar681._8_4_ = 0xbeaaaa53;
        auVar681._0_8_ = 0xbeaaaa53beaaaa53;
        auVar681._12_4_ = 0xbeaaaa53;
        auVar681._16_4_ = 0xbeaaaa53;
        auVar681._20_4_ = 0xbeaaaa53;
        auVar681._24_4_ = 0xbeaaaa53;
        auVar681._28_4_ = 0xbeaaaa53;
        auVar682._8_4_ = 0x3b3ac537;
        auVar682._0_8_ = 0x3b3ac5373b3ac537;
        auVar682._12_4_ = 0x3b3ac537;
        auVar682._16_4_ = 0x3b3ac537;
        auVar682._20_4_ = 0x3b3ac537;
        auVar682._24_4_ = 0x3b3ac537;
        auVar682._28_4_ = 0x3b3ac537;
        auVar562._8_4_ = 0x3d2edd4e;
        auVar562._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar562._12_4_ = 0x3d2edd4e;
        auVar562._16_4_ = 0x3d2edd4e;
        auVar562._20_4_ = 0x3d2edd4e;
        auVar562._24_4_ = 0x3d2edd4e;
        auVar562._28_4_ = 0x3d2edd4e;
        auVar563._8_4_ = 0x3dd9ed24;
        auVar563._0_8_ = 0x3dd9ed243dd9ed24;
        auVar563._12_4_ = 0x3dd9ed24;
        auVar563._16_4_ = 0x3dd9ed24;
        auVar563._20_4_ = 0x3dd9ed24;
        auVar563._24_4_ = 0x3dd9ed24;
        auVar563._28_4_ = 0x3dd9ed24;
        auVar564._8_4_ = 0x3e4cb974;
        auVar564._0_8_ = 0x3e4cb9743e4cb974;
        auVar564._12_4_ = 0x3e4cb974;
        auVar564._16_4_ = 0x3e4cb974;
        auVar564._20_4_ = 0x3e4cb974;
        auVar564._24_4_ = 0x3e4cb974;
        auVar564._28_4_ = 0x3e4cb974;
        auVar565._8_4_ = 0x3fc90fdb;
        auVar565._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar565._12_4_ = 0x3fc90fdb;
        auVar565._16_4_ = 0x3fc90fdb;
        auVar565._20_4_ = 0x3fc90fdb;
        auVar565._24_4_ = 0x3fc90fdb;
        auVar565._28_4_ = 0x3fc90fdb;
        auVar566._8_4_ = 0x40490fdb;
        auVar566._0_8_ = 0x40490fdb40490fdb;
        auVar566._12_4_ = 0x40490fdb;
        auVar566._16_4_ = 0x40490fdb;
        auVar566._20_4_ = 0x40490fdb;
        auVar566._24_4_ = 0x40490fdb;
        auVar566._28_4_ = 0x40490fdb;
        auVar567._8_4_ = 0x3fc90fdb;
        auVar567._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar567._12_4_ = 0x3fc90fdb;
        auVar567._16_4_ = 0x3fc90fdb;
        auVar567._20_4_ = 0x3fc90fdb;
        auVar567._24_4_ = 0x3fc90fdb;
        auVar567._28_4_ = 0x3fc90fdb;
        uVar872 = uVar422;
        do {
          auVar559 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
          auVar560 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1;
          auVar552 = vdivps_avx512vl(auVar560,auVar559);
          auVar561 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
          uVar46 = vcmpps_avx512vl(auVar560,auVar561,1);
          vandps_avx512vl(auVar552,auVar675);
          auVar553._8_4_ = 0xc0490fdb;
          auVar553._0_8_ = 0xc0490fdbc0490fdb;
          auVar553._12_4_ = 0xc0490fdb;
          auVar553._16_4_ = 0xc0490fdb;
          auVar553._20_4_ = 0xc0490fdb;
          auVar553._24_4_ = 0xc0490fdb;
          auVar553._28_4_ = 0xc0490fdb;
          auVar553 = vblendmps_avx512vl(auVar672,auVar553);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar554._0_4_ = (uint)bVar11 * auVar553._0_4_ | (uint)!bVar11 * in_ZMM20._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar554._4_4_ = (uint)bVar11 * auVar553._4_4_ | (uint)!bVar11 * in_ZMM20._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar554._8_4_ = (uint)bVar11 * auVar553._8_4_ | (uint)!bVar11 * in_ZMM20._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar554._12_4_ = (uint)bVar11 * auVar553._12_4_ | (uint)!bVar11 * in_ZMM20._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar554._16_4_ = (uint)bVar11 * auVar553._16_4_ | (uint)!bVar11 * in_ZMM20._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar554._20_4_ = (uint)bVar11 * auVar553._20_4_ | (uint)!bVar11 * in_ZMM20._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar554._24_4_ = (uint)bVar11 * auVar553._24_4_ | (uint)!bVar11 * in_ZMM20._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar554._28_4_ = (uint)bVar11 * auVar553._28_4_ | (uint)!bVar11 * in_ZMM20._28_4_;
          in_ZMM20 = ZEXT3264(auVar554);
          uVar46 = vcmpps_avx512vl(auVar684,auVar552,1);
          auVar556._8_4_ = 0xbf800000;
          auVar556._0_8_ = 0xbf800000bf800000;
          auVar556._12_4_ = 0xbf800000;
          auVar556._16_4_ = 0xbf800000;
          auVar556._20_4_ = 0xbf800000;
          auVar556._24_4_ = 0xbf800000;
          auVar556._28_4_ = 0xbf800000;
          auVar553 = vblendmps_avx512vl(auVar552,auVar556);
          bVar28 = (byte)uVar46;
          auVar557._0_4_ =
               (uint)(bVar28 & 1) * auVar553._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar557._4_4_ = (uint)bVar11 * auVar553._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar557._8_4_ = (uint)bVar11 * auVar553._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar557._12_4_ = (uint)bVar11 * auVar553._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar557._16_4_ = (uint)bVar11 * auVar553._16_4_ | (uint)!bVar11 * in_ZMM21._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar557._20_4_ = (uint)bVar11 * auVar553._20_4_ | (uint)!bVar11 * in_ZMM21._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar557._24_4_ = (uint)bVar11 * auVar553._24_4_ | (uint)!bVar11 * in_ZMM21._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar557._28_4_ = (uint)bVar11 * auVar553._28_4_ | (uint)!bVar11 * in_ZMM21._28_4_;
          auVar553 = vdivps_avx512vl(auVar557,auVar552);
          auVar555._0_4_ =
               (uint)(bVar28 & 1) * auVar553._0_4_ | !(bool)(bVar28 & 1) * auVar557._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar555._4_4_ = (uint)bVar11 * auVar553._4_4_ | !bVar11 * auVar557._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar555._8_4_ = (uint)bVar11 * auVar553._8_4_ | !bVar11 * auVar557._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar555._12_4_ = (uint)bVar11 * auVar553._12_4_ | !bVar11 * auVar557._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar555._16_4_ = (uint)bVar11 * auVar553._16_4_ | !bVar11 * auVar557._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar555._20_4_ = (uint)bVar11 * auVar553._20_4_ | !bVar11 * auVar557._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar555._24_4_ = (uint)bVar11 * auVar553._24_4_ | !bVar11 * auVar557._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar555._28_4_ = (uint)bVar11 * auVar553._28_4_ | !bVar11 * auVar557._28_4_;
          in_ZMM21 = ZEXT3264(auVar555);
          uVar426 = vcmpps_avx512vl(auVar560,auVar561,4);
          auVar553 = vmulps_avx512vl(auVar555,auVar555);
          uVar427 = vcmpps_avx512vl(auVar559,auVar561,1);
          auVar556 = vmulps_avx512vl(auVar553,auVar553);
          auVar557 = vfmadd213ps_avx512vl(auVar676,auVar556,auVar677);
          auVar557 = vfmadd213ps_avx512vl(auVar557,auVar556,auVar680);
          auVar558 = vfmadd213ps_avx512vl(auVar682,auVar556,auVar562);
          auVar558 = vfmadd213ps_avx512vl(auVar558,auVar556,auVar563);
          auVar557 = vfmadd213ps_avx512vl(auVar557,auVar556,auVar681);
          auVar558 = vfmadd213ps_avx512vl(auVar558,auVar556,auVar564);
          auVar556 = vfmadd213ps_avx512vl(auVar558,auVar556,auVar684);
          auVar553 = vfmadd231ps_avx512vl(auVar556,auVar553,auVar557);
          uVar428 = vcmpps_avx512vl(auVar559,auVar561,4);
          uVar428 = uVar426 & uVar428;
          auVar553 = vmulps_avx512vl(auVar553,auVar555);
          auVar556 = vaddps_avx512vl(auVar553,auVar565);
          auVar558._0_4_ =
               (uint)(bVar28 & 1) * auVar556._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar553._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar558._4_4_ = (uint)bVar11 * auVar556._4_4_ | (uint)!bVar11 * auVar553._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar558._8_4_ = (uint)bVar11 * auVar556._8_4_ | (uint)!bVar11 * auVar553._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar558._12_4_ = (uint)bVar11 * auVar556._12_4_ | (uint)!bVar11 * auVar553._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          auVar558._16_4_ = (uint)bVar11 * auVar556._16_4_ | (uint)!bVar11 * auVar553._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          auVar558._20_4_ = (uint)bVar11 * auVar556._20_4_ | (uint)!bVar11 * auVar553._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          auVar558._24_4_ = (uint)bVar11 * auVar556._24_4_ | (uint)!bVar11 * auVar553._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          auVar558._28_4_ = (uint)bVar11 * auVar556._28_4_ | (uint)!bVar11 * auVar553._28_4_;
          auVar559 = vpternlogd_avx512vl(auVar559,auVar566,auVar671,0xec);
          auVar553 = vpternlogd_avx512vl(auVar558,auVar552,auVar671,0xf8);
          uVar45 = vcmpps_avx512vl(auVar561,auVar559,2);
          bVar28 = ~((byte)uVar426 | (byte)uVar45);
          auVar559 = vaddps_avx512vl(auVar553,auVar554);
          bVar11 = (bool)((byte)uVar427 & 1);
          bVar14 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar427 >> 3) & 1);
          bVar20 = (bool)((byte)(uVar427 >> 4) & 1);
          bVar22 = (bool)((byte)(uVar427 >> 5) & 1);
          bVar24 = (bool)((byte)(uVar427 >> 6) & 1);
          bVar26 = SUB81(uVar427 >> 7,0);
          auVar556 = vmovdqa32_avx512vl(auVar566);
          iVar423 = (uint)(bVar28 & 1) * auVar556._0_4_;
          iVar421 = (uint)(bVar28 >> 1 & 1) * auVar556._4_4_;
          auVar552._4_4_ = iVar421;
          auVar552._0_4_ = iVar423;
          iVar1 = (uint)(bVar28 >> 2 & 1) * auVar556._8_4_;
          auVar552._8_4_ = iVar1;
          iVar2 = (uint)(bVar28 >> 3 & 1) * auVar556._12_4_;
          auVar552._12_4_ = iVar2;
          iVar3 = (uint)(bVar28 >> 4 & 1) * auVar556._16_4_;
          auVar552._16_4_ = iVar3;
          iVar4 = (uint)(bVar28 >> 5 & 1) * auVar556._20_4_;
          auVar552._20_4_ = iVar4;
          iVar5 = (uint)(bVar28 >> 6 & 1) * auVar556._24_4_;
          auVar552._24_4_ = iVar5;
          iVar6 = (uint)(bVar28 >> 7) * auVar556._28_4_;
          auVar552._28_4_ = iVar6;
          auVar560 = vpternlogd_avx512vl(auVar560,auVar552,auVar671,0xec);
          auVar560 = vpord_avx512vl(auVar560,auVar567);
          bVar12 = (bool)((byte)uVar426 & 1);
          bVar15 = (bool)((byte)(uVar426 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar426 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar426 >> 3) & 1);
          bVar21 = (bool)((byte)(uVar426 >> 4) & 1);
          bVar23 = (bool)((byte)(uVar426 >> 5) & 1);
          bVar25 = (bool)((byte)(uVar426 >> 6) & 1);
          bVar27 = SUB81(uVar426 >> 7,0);
          bVar13 = (bool)((byte)uVar428 & 1);
          auVar561._0_4_ =
               (uint)bVar13 * ((uint)bVar11 * auVar559._0_4_ | (uint)!bVar11 * auVar553._0_4_) |
               (uint)!bVar13 * ((uint)bVar12 * auVar560._0_4_ | (uint)!bVar12 * iVar423);
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          auVar561._4_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar559._4_4_ | (uint)!bVar14 * auVar553._4_4_) |
               (uint)!bVar11 * ((uint)bVar15 * auVar560._4_4_ | (uint)!bVar15 * iVar421);
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          auVar561._8_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar559._8_4_ | (uint)!bVar16 * auVar553._8_4_) |
               (uint)!bVar11 * ((uint)bVar17 * auVar560._8_4_ | (uint)!bVar17 * iVar1);
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar561._12_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar559._12_4_ | (uint)!bVar18 * auVar553._12_4_) |
               (uint)!bVar11 * ((uint)bVar19 * auVar560._12_4_ | (uint)!bVar19 * iVar2);
          bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
          auVar561._16_4_ =
               (uint)bVar11 * ((uint)bVar20 * auVar559._16_4_ | (uint)!bVar20 * auVar553._16_4_) |
               (uint)!bVar11 * ((uint)bVar21 * auVar560._16_4_ | (uint)!bVar21 * iVar3);
          bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
          auVar561._20_4_ =
               (uint)bVar11 * ((uint)bVar22 * auVar559._20_4_ | (uint)!bVar22 * auVar553._20_4_) |
               (uint)!bVar11 * ((uint)bVar23 * auVar560._20_4_ | (uint)!bVar23 * iVar4);
          bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
          auVar561._24_4_ =
               (uint)bVar11 * ((uint)bVar24 * auVar559._24_4_ | (uint)!bVar24 * auVar553._24_4_) |
               (uint)!bVar11 * ((uint)bVar25 * auVar560._24_4_ | (uint)!bVar25 * iVar5);
          bVar11 = SUB81(uVar428 >> 7,0);
          auVar561._28_4_ =
               (uint)bVar11 * ((uint)bVar26 * auVar559._28_4_ | (uint)!bVar26 * auVar553._28_4_) |
               (uint)!bVar11 * ((uint)bVar27 * auVar560._28_4_ | (uint)!bVar27 * iVar6);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar561;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar422 = uVar872 + 8;
          iVar421 = uVar872 + 0xf;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if ((int)(uVar422 | 3) < (int)uVar424) {
        auVar462 = ZEXT816(0) << 0x40;
        auVar492._8_4_ = 0x80000000;
        auVar492._0_8_ = 0x8000000080000000;
        auVar492._12_4_ = 0x80000000;
        auVar493._8_4_ = 0x40490fdb;
        auVar493._0_8_ = 0x40490fdb40490fdb;
        auVar493._12_4_ = 0x40490fdb;
        auVar516._8_4_ = 0x7fffffff;
        auVar516._0_8_ = 0x7fffffff7fffffff;
        auVar516._12_4_ = 0x7fffffff;
        auVar504._8_4_ = 0x3f800000;
        auVar504._0_8_ = 0x3f8000003f800000;
        auVar504._12_4_ = 0x3f800000;
        auVar496._8_4_ = 0xbc83a25c;
        auVar496._0_8_ = 0xbc83a25cbc83a25c;
        auVar496._12_4_ = 0xbc83a25c;
        auVar497._8_4_ = 0xbd99b01e;
        auVar497._0_8_ = 0xbd99b01ebd99b01e;
        auVar497._12_4_ = 0xbd99b01e;
        auVar498._8_4_ = 0xbe117200;
        auVar498._0_8_ = 0xbe117200be117200;
        auVar498._12_4_ = 0xbe117200;
        auVar501._8_4_ = 0xbeaaaa53;
        auVar501._0_8_ = 0xbeaaaa53beaaaa53;
        auVar501._12_4_ = 0xbeaaaa53;
        auVar502._8_4_ = 0x3b3ac537;
        auVar502._0_8_ = 0x3b3ac5373b3ac537;
        auVar502._12_4_ = 0x3b3ac537;
        auVar520._8_4_ = 0x3d2edd4e;
        auVar520._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar520._12_4_ = 0x3d2edd4e;
        auVar439._8_4_ = 0x3dd9ed24;
        auVar439._0_8_ = 0x3dd9ed243dd9ed24;
        auVar439._12_4_ = 0x3dd9ed24;
        auVar440._8_4_ = 0x3e4cb974;
        auVar440._0_8_ = 0x3e4cb9743e4cb974;
        auVar440._12_4_ = 0x3e4cb974;
        auVar441._8_4_ = 0x3fc90fdb;
        auVar441._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar441._12_4_ = 0x3fc90fdb;
        auVar442._8_4_ = 0x40490fdb;
        auVar442._0_8_ = 0x40490fdb40490fdb;
        auVar442._12_4_ = 0x40490fdb;
        auVar443._8_4_ = 0x3fc90fdb;
        auVar443._0_8_ = 0x3fc90fdb3fc90fdb;
        auVar443._12_4_ = 0x3fc90fdb;
        uVar872 = uVar422;
        do {
          auVar436 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr;
          auVar437 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1;
          auVar429 = vdivps_avx512vl(auVar437,auVar436);
          uVar46 = vcmpps_avx512vl(auVar437,auVar462,1);
          auVar430 = vandps_avx512vl(auVar429,auVar516);
          auVar431._8_4_ = 0xc0490fdb;
          auVar431._0_8_ = 0xc0490fdbc0490fdb;
          auVar431._12_4_ = 0xc0490fdb;
          auVar431 = vblendmps_avx512vl(auVar493,auVar431);
          bVar11 = (bool)((byte)uVar46 & 1);
          auVar432._0_4_ = (uint)bVar11 * auVar431._0_4_ | (uint)!bVar11 * in_ZMM20._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar432._4_4_ = (uint)bVar11 * auVar431._4_4_ | (uint)!bVar11 * in_ZMM20._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar432._8_4_ = (uint)bVar11 * auVar431._8_4_ | (uint)!bVar11 * in_ZMM20._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar432._12_4_ = (uint)bVar11 * auVar431._12_4_ | (uint)!bVar11 * in_ZMM20._12_4_;
          in_ZMM20 = ZEXT1664(auVar432);
          uVar46 = vcmpps_avx512vl(auVar504,auVar430,1);
          auVar433._8_4_ = 0xbf800000;
          auVar433._0_8_ = 0xbf800000bf800000;
          auVar433._12_4_ = 0xbf800000;
          auVar431 = vblendmps_avx512vl(auVar430,auVar433);
          bVar28 = (byte)uVar46;
          auVar434._0_4_ =
               (uint)(bVar28 & 1) * auVar431._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar434._4_4_ = (uint)bVar11 * auVar431._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar434._8_4_ = (uint)bVar11 * auVar431._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar434._12_4_ = (uint)bVar11 * auVar431._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          uVar426 = vcmpps_avx512vl(auVar437,auVar462,4);
          auVar431 = vdivps_avx512vl(auVar434,auVar430);
          auVar430._0_4_ =
               (uint)(bVar28 & 1) * auVar431._0_4_ | !(bool)(bVar28 & 1) * auVar434._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar430._4_4_ = (uint)bVar11 * auVar431._4_4_ | !bVar11 * auVar434._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar430._8_4_ = (uint)bVar11 * auVar431._8_4_ | !bVar11 * auVar434._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar430._12_4_ = (uint)bVar11 * auVar431._12_4_ | !bVar11 * auVar434._12_4_;
          in_ZMM21 = ZEXT1664(auVar430);
          auVar431 = vmulps_avx512vl(auVar430,auVar430);
          uVar427 = vcmpps_avx512vl(auVar436,auVar462,1);
          auVar433 = vmulps_avx512vl(auVar431,auVar431);
          auVar434 = vfmadd213ps_avx512vl(auVar496,auVar433,auVar497);
          auVar434 = vfmadd213ps_avx512vl(auVar434,auVar433,auVar498);
          auVar435 = vfmadd213ps_avx512vl(auVar502,auVar433,auVar520);
          auVar435 = vfmadd213ps_avx512vl(auVar435,auVar433,auVar439);
          auVar434 = vfmadd213ps_avx512vl(auVar434,auVar433,auVar501);
          auVar435 = vfmadd213ps_avx512vl(auVar435,auVar433,auVar440);
          auVar433 = vfmadd213ps_avx512vl(auVar435,auVar433,auVar504);
          auVar431 = vfmadd231ps_avx512vl(auVar433,auVar431,auVar434);
          uVar428 = vcmpps_avx512vl(auVar436,auVar462,4);
          uVar428 = uVar426 & uVar428;
          auVar431 = vmulps_avx512vl(auVar431,auVar430);
          auVar433 = vaddps_avx512vl(auVar431,auVar441);
          auVar435._0_4_ =
               (uint)(bVar28 & 1) * auVar433._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar431._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          auVar435._4_4_ = (uint)bVar11 * auVar433._4_4_ | (uint)!bVar11 * auVar431._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          auVar435._8_4_ = (uint)bVar11 * auVar433._8_4_ | (uint)!bVar11 * auVar431._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar435._12_4_ = (uint)bVar11 * auVar433._12_4_ | (uint)!bVar11 * auVar431._12_4_;
          auVar436 = vpternlogd_avx512vl(auVar436,auVar442,auVar492,0xec);
          auVar431 = vpternlogd_avx512vl(auVar435,auVar429,auVar492,0xf8);
          uVar45 = vcmpps_avx512vl(auVar462,auVar436,2);
          uVar47 = ~((ushort)uVar426 | (ushort)uVar45);
          auVar436 = vaddps_avx512vl(auVar431,auVar432);
          bVar11 = (bool)((byte)uVar427 & 1);
          bVar14 = (bool)((byte)(uVar427 >> 1) & 1);
          bVar16 = (bool)((byte)(uVar427 >> 2) & 1);
          bVar18 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar433 = vmovdqa32_avx512vl(auVar442);
          iVar2 = (uint)((byte)uVar47 & 1) * auVar433._0_4_;
          iVar1 = (uint)((byte)(uVar47 >> 1) & 1) * auVar433._4_4_;
          auVar429._4_4_ = iVar1;
          auVar429._0_4_ = iVar2;
          iVar423 = (uint)((byte)(uVar47 >> 2) & 1) * auVar433._8_4_;
          auVar429._8_4_ = iVar423;
          iVar421 = (uint)((byte)(uVar47 >> 3) & 1) * auVar433._12_4_;
          auVar429._12_4_ = iVar421;
          auVar437 = vpternlogd_avx512vl(auVar437,auVar429,auVar492,0xec);
          auVar437 = vpord_avx512vl(auVar437,auVar443);
          bVar12 = (bool)((byte)uVar426 & 1);
          bVar15 = (bool)((byte)(uVar426 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar426 >> 2) & 1);
          bVar19 = (bool)((byte)(uVar426 >> 3) & 1);
          bVar13 = (bool)((byte)uVar428 & 1);
          auVar438._0_4_ =
               (uint)bVar13 * ((uint)bVar11 * auVar436._0_4_ | (uint)!bVar11 * auVar431._0_4_) |
               (uint)!bVar13 * ((uint)bVar12 * auVar437._0_4_ | (uint)!bVar12 * iVar2);
          bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
          auVar438._4_4_ =
               (uint)bVar11 * ((uint)bVar14 * auVar436._4_4_ | (uint)!bVar14 * auVar431._4_4_) |
               (uint)!bVar11 * ((uint)bVar15 * auVar437._4_4_ | (uint)!bVar15 * iVar1);
          bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
          auVar438._8_4_ =
               (uint)bVar11 * ((uint)bVar16 * auVar436._8_4_ | (uint)!bVar16 * auVar431._8_4_) |
               (uint)!bVar11 * ((uint)bVar17 * auVar437._8_4_ | (uint)!bVar17 * iVar423);
          bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
          auVar438._12_4_ =
               (uint)bVar11 * ((uint)bVar18 * auVar436._12_4_ | (uint)!bVar18 * auVar431._12_4_) |
               (uint)!bVar11 * ((uint)bVar19 * auVar437._12_4_ | (uint)!bVar19 * iVar421);
          *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar438;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
          uVar422 = uVar872 + 4;
          iVar421 = uVar872 + 7;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        return;
      }
      lVar425 = 0;
      do {
        auVar559._0_4_ =
             atan2f(*(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4),
                    *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4));
        *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) = auVar559._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    if (bw != 1) {
      if (aw != 1) goto LAB_0039fb25;
      auVar559._0_4_ = *ptr;
      if (iVar421 == 4) {
        auVar462 = *(undefined1 (*) [16])ptr;
        auVar730 = ZEXT3264(CONCAT1616(auVar462,auVar462));
      }
      else {
        auVar462 = vpbroadcastd_avx512vl(ZEXT416((uint)auVar559._0_4_));
        if (iVar421 == 8) {
          auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
        }
        else {
          uVar880 = auVar462._0_4_;
          auVar1007._4_4_ = uVar880;
          auVar1007._0_4_ = uVar880;
          auVar1007._8_4_ = uVar880;
          auVar1007._12_4_ = uVar880;
          auVar1007._16_4_ = uVar880;
          auVar1007._20_4_ = uVar880;
          auVar1007._24_4_ = uVar880;
          auVar1007._28_4_ = uVar880;
          auVar730 = ZEXT3264(auVar1007);
          if (iVar421 == 0x10) {
            auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
            goto LAB_003ab936;
          }
        }
      }
      auVar1007 = auVar730._0_32_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar1007,1);
LAB_003ab936:
      uVar422 = 0;
      if (0xf < (int)uVar424) {
        auVar712 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
        auVar720._8_4_ = 0x80000000;
        auVar720._0_8_ = 0x8000000080000000;
        auVar720._12_4_ = 0x80000000;
        auVar720._16_4_ = 0x80000000;
        auVar720._20_4_ = 0x80000000;
        auVar720._24_4_ = 0x80000000;
        auVar720._28_4_ = 0x80000000;
        auVar720._32_4_ = 0x80000000;
        auVar720._36_4_ = 0x80000000;
        auVar720._40_4_ = 0x80000000;
        auVar720._44_4_ = 0x80000000;
        auVar720._48_4_ = 0x80000000;
        auVar720._52_4_ = 0x80000000;
        auVar720._56_4_ = 0x80000000;
        auVar720._60_4_ = 0x80000000;
        auVar712 = vpternlogd_avx512f(auVar712,auVar730,auVar720,0xf8);
        auVar732 = ZEXT864(0);
        auVar713 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
        uVar46 = vcmpps_avx512f(auVar712,auVar732,1);
        auVar712 = vdivps_avx512f(auVar713,auVar730);
        auVar714 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar721._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar714._4_4_;
        auVar721._0_4_ = (uint)((byte)uVar46 & 1) * auVar714._0_4_;
        auVar721._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar714._8_4_;
        auVar721._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar714._12_4_;
        auVar721._16_4_ = (uint)((byte)(uVar46 >> 4) & 1) * auVar714._16_4_;
        auVar721._20_4_ = (uint)((byte)(uVar46 >> 5) & 1) * auVar714._20_4_;
        auVar721._24_4_ = (uint)((byte)(uVar46 >> 6) & 1) * auVar714._24_4_;
        auVar721._28_4_ = (uint)((byte)(uVar46 >> 7) & 1) * auVar714._28_4_;
        auVar721._32_4_ = (uint)((byte)(uVar46 >> 8) & 1) * auVar714._32_4_;
        auVar721._36_4_ = (uint)((byte)(uVar46 >> 9) & 1) * auVar714._36_4_;
        auVar721._40_4_ = (uint)((byte)(uVar46 >> 10) & 1) * auVar714._40_4_;
        auVar721._44_4_ = (uint)((byte)(uVar46 >> 0xb) & 1) * auVar714._44_4_;
        auVar721._48_4_ = (uint)((byte)(uVar46 >> 0xc) & 1) * auVar714._48_4_;
        auVar721._52_4_ = (uint)((byte)(uVar46 >> 0xd) & 1) * auVar714._52_4_;
        auVar721._56_4_ = (uint)((byte)(uVar46 >> 0xe) & 1) * auVar714._56_4_;
        auVar721._60_4_ = (uint)(byte)(uVar46 >> 0xf) * auVar714._60_4_;
        iVar421 = 0xf;
        uVar46 = vcmpps_avx512f(auVar730,auVar732,1);
        auVar714 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
        auVar715 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar716 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
        auVar717 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
        auVar718 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
        auVar719 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
        auVar720 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
        auVar722 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
        auVar723 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
        auVar724 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
        auVar725 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
        auVar726 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
        uVar426 = vcmpps_avx512f(auVar730,auVar732,4);
        auVar1755 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
        auVar730 = in_ZMM22;
        do {
          auVar845 = *(undefined1 (*) [64])ptr1;
          auVar729 = vmulps_avx512f(auVar845,auVar712);
          uVar427 = vcmpps_avx512f(auVar845,auVar732,1);
          auVar727 = vandps_avx512dq(auVar729,auVar716);
          auVar325._8_4_ = 0xc0490fdb;
          auVar325._0_8_ = 0xc0490fdbc0490fdb;
          auVar325._12_4_ = 0xc0490fdb;
          auVar325._16_4_ = 0xc0490fdb;
          auVar325._20_4_ = 0xc0490fdb;
          auVar325._24_4_ = 0xc0490fdb;
          auVar325._28_4_ = 0xc0490fdb;
          auVar325._32_4_ = 0xc0490fdb;
          auVar325._36_4_ = 0xc0490fdb;
          auVar325._40_4_ = 0xc0490fdb;
          auVar325._44_4_ = 0xc0490fdb;
          auVar325._48_4_ = 0xc0490fdb;
          auVar325._52_4_ = 0xc0490fdb;
          auVar325._56_4_ = 0xc0490fdb;
          auVar325._60_4_ = 0xc0490fdb;
          auVar728 = vblendmps_avx512f(auVar715,auVar325);
          bVar11 = (bool)((byte)uVar427 & 1);
          in_ZMM22._0_4_ = (uint)bVar11 * auVar728._0_4_ | (uint)!bVar11 * auVar730._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          in_ZMM22._4_4_ = (uint)bVar11 * auVar728._4_4_ | (uint)!bVar11 * auVar730._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          in_ZMM22._8_4_ = (uint)bVar11 * auVar728._8_4_ | (uint)!bVar11 * auVar730._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          in_ZMM22._12_4_ = (uint)bVar11 * auVar728._12_4_ | (uint)!bVar11 * auVar730._12_4_;
          bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
          in_ZMM22._16_4_ = (uint)bVar11 * auVar728._16_4_ | (uint)!bVar11 * auVar730._16_4_;
          bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
          in_ZMM22._20_4_ = (uint)bVar11 * auVar728._20_4_ | (uint)!bVar11 * auVar730._20_4_;
          bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
          in_ZMM22._24_4_ = (uint)bVar11 * auVar728._24_4_ | (uint)!bVar11 * auVar730._24_4_;
          bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
          in_ZMM22._28_4_ = (uint)bVar11 * auVar728._28_4_ | (uint)!bVar11 * auVar730._28_4_;
          bVar11 = (bool)((byte)(uVar427 >> 8) & 1);
          in_ZMM22._32_4_ = (uint)bVar11 * auVar728._32_4_ | (uint)!bVar11 * auVar730._32_4_;
          bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
          in_ZMM22._36_4_ = (uint)bVar11 * auVar728._36_4_ | (uint)!bVar11 * auVar730._36_4_;
          bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
          in_ZMM22._40_4_ = (uint)bVar11 * auVar728._40_4_ | (uint)!bVar11 * auVar730._40_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
          in_ZMM22._44_4_ = (uint)bVar11 * auVar728._44_4_ | (uint)!bVar11 * auVar730._44_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
          in_ZMM22._48_4_ = (uint)bVar11 * auVar728._48_4_ | (uint)!bVar11 * auVar730._48_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
          in_ZMM22._52_4_ = (uint)bVar11 * auVar728._52_4_ | (uint)!bVar11 * auVar730._52_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
          in_ZMM22._56_4_ = (uint)bVar11 * auVar728._56_4_ | (uint)!bVar11 * auVar730._56_4_;
          bVar11 = SUB81(uVar427 >> 0xf,0);
          in_ZMM22._60_4_ = (uint)bVar11 * auVar728._60_4_ | (uint)!bVar11 * auVar730._60_4_;
          uVar427 = vcmpps_avx512f(auVar713,auVar727,1);
          auVar326._8_4_ = 0xbf800000;
          auVar326._0_8_ = 0xbf800000bf800000;
          auVar326._12_4_ = 0xbf800000;
          auVar326._16_4_ = 0xbf800000;
          auVar326._20_4_ = 0xbf800000;
          auVar326._24_4_ = 0xbf800000;
          auVar326._28_4_ = 0xbf800000;
          auVar326._32_4_ = 0xbf800000;
          auVar326._36_4_ = 0xbf800000;
          auVar326._40_4_ = 0xbf800000;
          auVar326._44_4_ = 0xbf800000;
          auVar326._48_4_ = 0xbf800000;
          auVar326._52_4_ = 0xbf800000;
          auVar326._56_4_ = 0xbf800000;
          auVar326._60_4_ = 0xbf800000;
          auVar730 = vblendmps_avx512f(auVar727,auVar326);
          bVar11 = (bool)((byte)uVar427 & 1);
          auVar859._0_4_ = (uint)bVar11 * auVar730._0_4_ | (uint)!bVar11 * in_ZMM23._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar859._4_4_ = (uint)bVar11 * auVar730._4_4_ | (uint)!bVar11 * in_ZMM23._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar859._8_4_ = (uint)bVar11 * auVar730._8_4_ | (uint)!bVar11 * in_ZMM23._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar859._12_4_ = (uint)bVar11 * auVar730._12_4_ | (uint)!bVar11 * in_ZMM23._12_4_;
          bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
          auVar859._16_4_ = (uint)bVar11 * auVar730._16_4_ | (uint)!bVar11 * in_ZMM23._16_4_;
          bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
          auVar859._20_4_ = (uint)bVar11 * auVar730._20_4_ | (uint)!bVar11 * in_ZMM23._20_4_;
          bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
          auVar859._24_4_ = (uint)bVar11 * auVar730._24_4_ | (uint)!bVar11 * in_ZMM23._24_4_;
          bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
          auVar859._28_4_ = (uint)bVar11 * auVar730._28_4_ | (uint)!bVar11 * in_ZMM23._28_4_;
          bVar28 = (byte)(uVar427 >> 8);
          bVar11 = (bool)(bVar28 & 1);
          auVar859._32_4_ = (uint)bVar11 * auVar730._32_4_ | (uint)!bVar11 * in_ZMM23._32_4_;
          bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
          auVar859._36_4_ = (uint)bVar11 * auVar730._36_4_ | (uint)!bVar11 * in_ZMM23._36_4_;
          bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
          auVar859._40_4_ = (uint)bVar11 * auVar730._40_4_ | (uint)!bVar11 * in_ZMM23._40_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
          auVar859._44_4_ = (uint)bVar11 * auVar730._44_4_ | (uint)!bVar11 * in_ZMM23._44_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
          auVar859._48_4_ = (uint)bVar11 * auVar730._48_4_ | (uint)!bVar11 * in_ZMM23._48_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
          auVar859._52_4_ = (uint)bVar11 * auVar730._52_4_ | (uint)!bVar11 * in_ZMM23._52_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
          auVar859._56_4_ = (uint)bVar11 * auVar730._56_4_ | (uint)!bVar11 * in_ZMM23._56_4_;
          bVar11 = SUB81(uVar427 >> 0xf,0);
          auVar859._60_4_ = (uint)bVar11 * auVar730._60_4_ | (uint)!bVar11 * in_ZMM23._60_4_;
          auVar730 = vmaxps_avx512f(auVar727,auVar713);
          auVar730 = vdivps_avx512f(auVar859,auVar730);
          in_ZMM23 = vmulps_avx512f(auVar730,auVar730);
          auVar727 = vmulps_avx512f(in_ZMM23,in_ZMM23);
          auVar728 = vfmadd213ps_avx512f(auVar717,auVar727,auVar718);
          auVar728 = vfmadd213ps_avx512f(auVar728,auVar727,auVar719);
          auVar731 = vfmadd213ps_avx512f(auVar722,auVar727,auVar723);
          auVar731 = vfmadd213ps_avx512f(auVar731,auVar727,auVar724);
          auVar731 = vfmadd213ps_avx512f(auVar731,auVar727,auVar725);
          auVar728 = vfmadd213ps_avx512f(auVar728,auVar727,auVar720);
          auVar727 = vfmadd213ps_avx512f(auVar731,auVar727,auVar713);
          auVar727 = vfmadd231ps_avx512f(auVar727,in_ZMM23,auVar728);
          auVar730 = vmulps_avx512f(auVar727,auVar730);
          uVar428 = vcmpps_avx512f(auVar845,auVar732,4);
          auVar727 = vaddps_avx512f(auVar730,auVar726);
          bVar11 = (bool)((byte)uVar427 & 1);
          auVar860._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar730._0_4_;
          bVar11 = (bool)((byte)(uVar427 >> 1) & 1);
          auVar860._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar730._4_4_;
          bVar11 = (bool)((byte)(uVar427 >> 2) & 1);
          auVar860._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar730._8_4_;
          bVar11 = (bool)((byte)(uVar427 >> 3) & 1);
          auVar860._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar730._12_4_;
          bVar11 = (bool)((byte)(uVar427 >> 4) & 1);
          auVar860._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar730._16_4_;
          bVar11 = (bool)((byte)(uVar427 >> 5) & 1);
          auVar860._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar730._20_4_;
          bVar11 = (bool)((byte)(uVar427 >> 6) & 1);
          auVar860._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar730._24_4_;
          bVar11 = (bool)((byte)(uVar427 >> 7) & 1);
          auVar860._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar730._28_4_;
          bVar11 = (bool)(bVar28 & 1);
          auVar860._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar730._32_4_;
          bVar11 = (bool)((byte)(uVar427 >> 9) & 1);
          auVar860._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar730._36_4_;
          bVar11 = (bool)((byte)(uVar427 >> 10) & 1);
          auVar860._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar730._40_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xb) & 1);
          auVar860._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar730._44_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xc) & 1);
          auVar860._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar730._48_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xd) & 1);
          auVar860._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar730._52_4_;
          bVar11 = (bool)((byte)(uVar427 >> 0xe) & 1);
          auVar860._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar730._56_4_;
          bVar11 = SUB81(uVar427 >> 0xf,0);
          auVar860._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar730._60_4_;
          auVar730 = vpternlogd_avx512f(auVar860,auVar729,auVar714,0xf8);
          auVar729 = vaddps_avx512f(auVar730,in_ZMM22);
          bVar11 = (bool)((byte)uVar46 & 1);
          in_ZMM21._0_4_ = (uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar730._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          in_ZMM21._4_4_ = (uint)bVar11 * auVar729._4_4_ | (uint)!bVar11 * auVar730._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          in_ZMM21._8_4_ = (uint)bVar11 * auVar729._8_4_ | (uint)!bVar11 * auVar730._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          in_ZMM21._12_4_ = (uint)bVar11 * auVar729._12_4_ | (uint)!bVar11 * auVar730._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          in_ZMM21._16_4_ = (uint)bVar11 * auVar729._16_4_ | (uint)!bVar11 * auVar730._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          in_ZMM21._20_4_ = (uint)bVar11 * auVar729._20_4_ | (uint)!bVar11 * auVar730._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          in_ZMM21._24_4_ = (uint)bVar11 * auVar729._24_4_ | (uint)!bVar11 * auVar730._24_4_;
          bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
          in_ZMM21._28_4_ = (uint)bVar11 * auVar729._28_4_ | (uint)!bVar11 * auVar730._28_4_;
          bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
          in_ZMM21._32_4_ = (uint)bVar11 * auVar729._32_4_ | (uint)!bVar11 * auVar730._32_4_;
          bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
          in_ZMM21._36_4_ = (uint)bVar11 * auVar729._36_4_ | (uint)!bVar11 * auVar730._36_4_;
          bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
          in_ZMM21._40_4_ = (uint)bVar11 * auVar729._40_4_ | (uint)!bVar11 * auVar730._40_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
          in_ZMM21._44_4_ = (uint)bVar11 * auVar729._44_4_ | (uint)!bVar11 * auVar730._44_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
          in_ZMM21._48_4_ = (uint)bVar11 * auVar729._48_4_ | (uint)!bVar11 * auVar730._48_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
          in_ZMM21._52_4_ = (uint)bVar11 * auVar729._52_4_ | (uint)!bVar11 * auVar730._52_4_;
          bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
          in_ZMM21._56_4_ = (uint)bVar11 * auVar729._56_4_ | (uint)!bVar11 * auVar730._56_4_;
          bVar11 = SUB81(uVar46 >> 0xf,0);
          in_ZMM21._60_4_ = (uint)bVar11 * auVar729._60_4_ | (uint)!bVar11 * auVar730._60_4_;
          auVar730 = vpternlogd_avx512f(auVar845,auVar714,auVar1755,0xea);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar861._0_4_ = bVar11 * in_ZMM21._0_4_ | (uint)!bVar11 * auVar730._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar861._4_4_ = bVar11 * in_ZMM21._4_4_ | (uint)!bVar11 * auVar730._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar861._8_4_ = bVar11 * in_ZMM21._8_4_ | (uint)!bVar11 * auVar730._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar861._12_4_ = bVar11 * in_ZMM21._12_4_ | (uint)!bVar11 * auVar730._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar861._16_4_ = bVar11 * in_ZMM21._16_4_ | (uint)!bVar11 * auVar730._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar861._20_4_ = bVar11 * in_ZMM21._20_4_ | (uint)!bVar11 * auVar730._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar861._24_4_ = bVar11 * in_ZMM21._24_4_ | (uint)!bVar11 * auVar730._24_4_;
          bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
          auVar861._28_4_ = bVar11 * in_ZMM21._28_4_ | (uint)!bVar11 * auVar730._28_4_;
          bVar11 = (bool)((byte)(uVar426 >> 8) & 1);
          auVar861._32_4_ = bVar11 * in_ZMM21._32_4_ | (uint)!bVar11 * auVar730._32_4_;
          bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
          auVar861._36_4_ = bVar11 * in_ZMM21._36_4_ | (uint)!bVar11 * auVar730._36_4_;
          bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
          auVar861._40_4_ = bVar11 * in_ZMM21._40_4_ | (uint)!bVar11 * auVar730._40_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
          auVar861._44_4_ = bVar11 * in_ZMM21._44_4_ | (uint)!bVar11 * auVar730._44_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
          auVar861._48_4_ = bVar11 * in_ZMM21._48_4_ | (uint)!bVar11 * auVar730._48_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
          auVar861._52_4_ = bVar11 * in_ZMM21._52_4_ | (uint)!bVar11 * auVar730._52_4_;
          bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
          auVar861._56_4_ = bVar11 * in_ZMM21._56_4_ | (uint)!bVar11 * auVar730._56_4_;
          bVar11 = SUB81(uVar426 >> 0xf,0);
          auVar861._60_4_ = bVar11 * in_ZMM21._60_4_ | (uint)!bVar11 * auVar730._60_4_;
          auVar730 = vblendmps_avx512f(auVar721,auVar861);
          bVar11 = (bool)((byte)uVar428 & 1);
          bVar12 = (bool)((byte)(uVar428 >> 1) & 1);
          bVar13 = (bool)((byte)(uVar428 >> 2) & 1);
          bVar14 = (bool)((byte)(uVar428 >> 3) & 1);
          bVar15 = (bool)((byte)(uVar428 >> 4) & 1);
          bVar16 = (bool)((byte)(uVar428 >> 5) & 1);
          bVar17 = (bool)((byte)(uVar428 >> 6) & 1);
          bVar18 = (bool)((byte)(uVar428 >> 7) & 1);
          bVar19 = (bool)((byte)(uVar428 >> 8) & 1);
          bVar20 = (bool)((byte)(uVar428 >> 9) & 1);
          bVar21 = (bool)((byte)(uVar428 >> 10) & 1);
          bVar22 = (bool)((byte)(uVar428 >> 0xb) & 1);
          bVar23 = (bool)((byte)(uVar428 >> 0xc) & 1);
          bVar24 = (bool)((byte)(uVar428 >> 0xd) & 1);
          bVar25 = (bool)((byte)(uVar428 >> 0xe) & 1);
          bVar26 = SUB81(uVar428 >> 0xf,0);
          *outptr = (float)((uint)bVar11 * auVar730._0_4_ | !bVar11 * auVar861._0_4_);
          outptr[1] = (float)((uint)bVar12 * auVar730._4_4_ | !bVar12 * auVar861._4_4_);
          outptr[2] = (float)((uint)bVar13 * auVar730._8_4_ | !bVar13 * auVar861._8_4_);
          outptr[3] = (float)((uint)bVar14 * auVar730._12_4_ | !bVar14 * auVar861._12_4_);
          outptr[4] = (float)((uint)bVar15 * auVar730._16_4_ | !bVar15 * auVar861._16_4_);
          outptr[5] = (float)((uint)bVar16 * auVar730._20_4_ | !bVar16 * auVar861._20_4_);
          outptr[6] = (float)((uint)bVar17 * auVar730._24_4_ | !bVar17 * auVar861._24_4_);
          outptr[7] = (float)((uint)bVar18 * auVar730._28_4_ | !bVar18 * auVar861._28_4_);
          outptr[8] = (float)((uint)bVar19 * auVar730._32_4_ | !bVar19 * auVar861._32_4_);
          outptr[9] = (float)((uint)bVar20 * auVar730._36_4_ | !bVar20 * auVar861._36_4_);
          outptr[10] = (float)((uint)bVar21 * auVar730._40_4_ | !bVar21 * auVar861._40_4_);
          outptr[0xb] = (float)((uint)bVar22 * auVar730._44_4_ | !bVar22 * auVar861._44_4_);
          outptr[0xc] = (float)((uint)bVar23 * auVar730._48_4_ | !bVar23 * auVar861._48_4_);
          outptr[0xd] = (float)((uint)bVar24 * auVar730._52_4_ | !bVar24 * auVar861._52_4_);
          outptr[0xe] = (float)((uint)bVar25 * auVar730._56_4_ | !bVar25 * auVar861._56_4_);
          outptr[0xf] = (float)((uint)bVar26 * auVar730._60_4_ | !bVar26 * auVar861._60_4_);
          ptr1 = (float *)((long)ptr1 + 0x40);
          outptr = outptr + 0x10;
          iVar421 = iVar421 + 0x10;
          auVar730 = in_ZMM22;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
      }
      if ((int)(uVar422 | 7) < (int)uVar424) {
        auVar1076._8_4_ = 0x40490fdb;
        auVar1076._0_8_ = 0x40490fdb40490fdb;
        auVar1076._12_4_ = 0x40490fdb;
        auVar1076._16_4_ = 0x40490fdb;
        auVar1076._20_4_ = 0x40490fdb;
        auVar1076._24_4_ = 0x40490fdb;
        auVar1076._28_4_ = 0x40490fdb;
        auVar1318._8_4_ = 0x80000000;
        auVar1318._0_8_ = 0x8000000080000000;
        auVar1318._12_4_ = 0x80000000;
        auVar1318._16_4_ = 0x80000000;
        auVar1318._20_4_ = 0x80000000;
        auVar1318._24_4_ = 0x80000000;
        auVar1318._28_4_ = 0x80000000;
        auVar672 = vpternlogd_avx512vl(auVar1318,auVar1007,auVar1076,0xea);
        auVar1134._8_4_ = 0x3f800000;
        auVar1134._0_8_ = 0x3f8000003f800000;
        auVar1134._12_4_ = 0x3f800000;
        auVar1134._16_4_ = 0x3f800000;
        auVar1134._20_4_ = 0x3f800000;
        auVar1134._24_4_ = 0x3f800000;
        auVar1134._28_4_ = 0x3f800000;
        auVar671 = vdivps_avx(auVar1134,auVar1007);
        auVar492 = ZEXT816(0) << 0x40;
        uVar45 = vcmpps_avx512vl(ZEXT1632(auVar492),auVar672,2);
        uVar46 = vcmpps_avx512vl(auVar1007,ZEXT1632(auVar492),1);
        auVar1319._8_4_ = 0x80000000;
        auVar1319._0_8_ = 0x8000000080000000;
        auVar1319._12_4_ = 0x80000000;
        auVar1319._16_4_ = 0x80000000;
        auVar1319._20_4_ = 0x80000000;
        auVar1319._24_4_ = 0x80000000;
        auVar1319._28_4_ = 0x80000000;
        auVar1374._8_4_ = 0x40490fdb;
        auVar1374._0_8_ = 0x40490fdb40490fdb;
        auVar1374._12_4_ = 0x40490fdb;
        auVar1374._16_4_ = 0x40490fdb;
        auVar1374._20_4_ = 0x40490fdb;
        auVar1374._24_4_ = 0x40490fdb;
        auVar1374._28_4_ = 0x40490fdb;
        auVar1430._8_4_ = 0x7fffffff;
        auVar1430._0_8_ = 0x7fffffff7fffffff;
        auVar1430._12_4_ = 0x7fffffff;
        auVar1430._16_4_ = 0x7fffffff;
        auVar1430._20_4_ = 0x7fffffff;
        auVar1430._24_4_ = 0x7fffffff;
        auVar1430._28_4_ = 0x7fffffff;
        auVar1484._8_4_ = 0xbc83a25c;
        auVar1484._0_8_ = 0xbc83a25cbc83a25c;
        auVar1484._12_4_ = 0xbc83a25c;
        auVar1484._16_4_ = 0xbc83a25c;
        auVar1484._20_4_ = 0xbc83a25c;
        auVar1484._24_4_ = 0xbc83a25c;
        auVar1484._28_4_ = 0xbc83a25c;
        auVar1538._8_4_ = 0xbd99b01e;
        auVar1538._0_8_ = 0xbd99b01ebd99b01e;
        auVar1538._12_4_ = 0xbd99b01e;
        auVar1538._16_4_ = 0xbd99b01e;
        auVar1538._20_4_ = 0xbd99b01e;
        auVar1538._24_4_ = 0xbd99b01e;
        auVar1538._28_4_ = 0xbd99b01e;
        auVar1592._8_4_ = 0xbe117200;
        auVar1592._0_8_ = 0xbe117200be117200;
        auVar1592._12_4_ = 0xbe117200;
        auVar1592._16_4_ = 0xbe117200;
        auVar1592._20_4_ = 0xbe117200;
        auVar1592._24_4_ = 0xbe117200;
        auVar1592._28_4_ = 0xbe117200;
        auVar1646._8_4_ = 0xbeaaaa53;
        auVar1646._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1646._12_4_ = 0xbeaaaa53;
        auVar1646._16_4_ = 0xbeaaaa53;
        auVar1646._20_4_ = 0xbeaaaa53;
        auVar1646._24_4_ = 0xbeaaaa53;
        auVar1646._28_4_ = 0xbeaaaa53;
        auVar1700._8_4_ = 0x3b3ac537;
        auVar1700._0_8_ = 0x3b3ac5373b3ac537;
        auVar1700._12_4_ = 0x3b3ac537;
        auVar1700._16_4_ = 0x3b3ac537;
        auVar1700._20_4_ = 0x3b3ac537;
        auVar1700._24_4_ = 0x3b3ac537;
        auVar1700._28_4_ = 0x3b3ac537;
        auVar1751._8_4_ = 0x3d2edd4e;
        auVar1751._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1751._12_4_ = 0x3d2edd4e;
        auVar1751._16_4_ = 0x3d2edd4e;
        auVar1751._20_4_ = 0x3d2edd4e;
        auVar1751._24_4_ = 0x3d2edd4e;
        auVar1751._28_4_ = 0x3d2edd4e;
        auVar1800._8_4_ = 0x3dd9ed24;
        auVar1800._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1800._12_4_ = 0x3dd9ed24;
        auVar1800._16_4_ = 0x3dd9ed24;
        auVar1800._20_4_ = 0x3dd9ed24;
        auVar1800._24_4_ = 0x3dd9ed24;
        auVar1800._28_4_ = 0x3dd9ed24;
        auVar672 = vbroadcastss_avx512vl(ZEXT416(0x3e4cb974));
        auVar675 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        auVar684 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        uVar872 = uVar422;
        do {
          auVar676 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr1;
          auVar677 = vmulps_avx512vl(auVar676,auVar671);
          auVar562 = ZEXT1632(auVar492);
          uVar426 = vcmpps_avx512vl(auVar676,auVar562,1);
          vandps_avx512vl(auVar677,auVar1430);
          auVar170._8_4_ = 0xc0490fdb;
          auVar170._0_8_ = 0xc0490fdbc0490fdb;
          auVar170._12_4_ = 0xc0490fdb;
          auVar170._16_4_ = 0xc0490fdb;
          auVar170._20_4_ = 0xc0490fdb;
          auVar170._24_4_ = 0xc0490fdb;
          auVar170._28_4_ = 0xc0490fdb;
          auVar680 = vblendmps_avx512vl(auVar1374,auVar170);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar696._0_4_ = (uint)bVar11 * auVar680._0_4_ | (uint)!bVar11 * in_ZMM22._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar696._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar696._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar696._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar696._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar696._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar696._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar696._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
          in_ZMM22 = ZEXT3264(auVar696);
          uVar426 = vcmpps_avx512vl(auVar1134,auVar677,1);
          auVar171._8_4_ = 0xbf800000;
          auVar171._0_8_ = 0xbf800000bf800000;
          auVar171._12_4_ = 0xbf800000;
          auVar171._16_4_ = 0xbf800000;
          auVar171._20_4_ = 0xbf800000;
          auVar171._24_4_ = 0xbf800000;
          auVar171._28_4_ = 0xbf800000;
          auVar680 = vblendmps_avx512vl(auVar677,auVar171);
          bVar28 = (byte)uVar426;
          auVar697._0_4_ =
               (uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM23._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar697._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * in_ZMM23._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar697._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * in_ZMM23._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar697._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * in_ZMM23._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar697._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * in_ZMM23._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar697._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * in_ZMM23._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar697._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * in_ZMM23._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar697._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * in_ZMM23._28_4_;
          auVar680 = vdivps_avx512vl(auVar697,auVar677);
          auVar698._0_4_ =
               (uint)(bVar28 & 1) * auVar680._0_4_ | !(bool)(bVar28 & 1) * auVar697._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar698._4_4_ = (uint)bVar11 * auVar680._4_4_ | !bVar11 * auVar697._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar698._8_4_ = (uint)bVar11 * auVar680._8_4_ | !bVar11 * auVar697._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar698._12_4_ = (uint)bVar11 * auVar680._12_4_ | !bVar11 * auVar697._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar698._16_4_ = (uint)bVar11 * auVar680._16_4_ | !bVar11 * auVar697._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar698._20_4_ = (uint)bVar11 * auVar680._20_4_ | !bVar11 * auVar697._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar698._24_4_ = (uint)bVar11 * auVar680._24_4_ | !bVar11 * auVar697._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar698._28_4_ = (uint)bVar11 * auVar680._28_4_ | !bVar11 * auVar697._28_4_;
          in_ZMM23 = ZEXT3264(auVar698);
          uVar427 = vcmpps_avx512vl(auVar676,auVar562,4);
          auVar680 = vmulps_avx512vl(auVar698,auVar698);
          vandps_avx512vl(auVar676,auVar1319);
          auVar676 = vmulps_avx512vl(auVar680,auVar680);
          auVar681 = vfmadd213ps_avx512vl(auVar1484,auVar676,auVar1538);
          auVar681 = vfmadd213ps_avx512vl(auVar681,auVar676,auVar1592);
          auVar682 = vfmadd213ps_avx512vl(auVar1700,auVar676,auVar1751);
          auVar682 = vfmadd213ps_avx512vl(auVar682,auVar676,auVar1800);
          auVar681 = vfmadd213ps_avx512vl(auVar681,auVar676,auVar1646);
          auVar682 = vfmadd213ps_avx512vl(auVar682,auVar676,auVar672);
          auVar676 = vfmadd213ps_avx512vl(auVar682,auVar676,auVar1134);
          auVar676 = vfmadd231ps_avx512vl(auVar676,auVar680,auVar681);
          uVar428 = vcmpps_avx512vl(auVar1007,auVar562,4);
          uVar428 = uVar427 & uVar428;
          auVar676 = vmulps_avx512vl(auVar676,auVar698);
          auVar681 = vaddps_avx512vl(auVar676,auVar675);
          auVar699._0_4_ =
               (uint)(bVar28 & 1) * auVar681._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar676._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar699._4_4_ = (uint)bVar11 * auVar681._4_4_ | (uint)!bVar11 * auVar676._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar699._8_4_ = (uint)bVar11 * auVar681._8_4_ | (uint)!bVar11 * auVar676._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar699._12_4_ = (uint)bVar11 * auVar681._12_4_ | (uint)!bVar11 * auVar676._12_4_;
          bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
          auVar699._16_4_ = (uint)bVar11 * auVar681._16_4_ | (uint)!bVar11 * auVar676._16_4_;
          bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
          auVar699._20_4_ = (uint)bVar11 * auVar681._20_4_ | (uint)!bVar11 * auVar676._20_4_;
          bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
          auVar699._24_4_ = (uint)bVar11 * auVar681._24_4_ | (uint)!bVar11 * auVar676._24_4_;
          bVar11 = SUB81(uVar426 >> 7,0);
          auVar699._28_4_ = (uint)bVar11 * auVar681._28_4_ | (uint)!bVar11 * auVar676._28_4_;
          auVar676 = vpternlogd_avx512vl(auVar699,auVar677,auVar1319,0xf8);
          auVar677 = vaddps_avx512vl(auVar676,auVar696);
          bVar11 = (bool)((byte)uVar46 & 1);
          uVar422 = (uint)bVar11 * auVar677._0_4_ | (uint)!bVar11 * auVar676._0_4_;
          bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
          uVar873 = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * auVar676._4_4_;
          bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
          uVar874 = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * auVar676._8_4_;
          bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
          uVar875 = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * auVar676._12_4_;
          bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
          uVar876 = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * auVar676._16_4_;
          bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
          uVar877 = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * auVar676._20_4_;
          bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
          uVar878 = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * auVar676._24_4_;
          bVar11 = SUB81(uVar46 >> 7,0);
          uVar879 = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * auVar676._28_4_;
          in_ZMM21 = ZEXT3264(CONCAT428(uVar879,CONCAT424(uVar878,CONCAT420(uVar877,CONCAT416(
                                                  uVar876,CONCAT412(uVar875,CONCAT48(uVar874,
                                                  CONCAT44(uVar873,uVar422))))))));
          auVar676 = vorps_avx512vl(auVar680,auVar684);
          auVar700._4_4_ = (uint)((byte)(uVar427 >> 1) & 1) * auVar676._4_4_;
          auVar700._0_4_ = (uint)((byte)uVar427 & 1) * auVar676._0_4_;
          auVar700._8_4_ = (uint)((byte)(uVar427 >> 2) & 1) * auVar676._8_4_;
          auVar700._12_4_ = (uint)((byte)(uVar427 >> 3) & 1) * auVar676._12_4_;
          auVar700._16_4_ = (uint)((byte)(uVar427 >> 4) & 1) * auVar676._16_4_;
          auVar700._20_4_ = (uint)((byte)(uVar427 >> 5) & 1) * auVar676._20_4_;
          auVar700._24_4_ = (uint)((byte)(uVar427 >> 6) & 1) * auVar676._24_4_;
          auVar700._28_4_ = (uint)(byte)(uVar427 >> 7) * auVar676._28_4_;
          bVar28 = (byte)uVar427 | (byte)uVar45;
          auVar676 = vorps_avx512vl(auVar700,auVar1076);
          auVar677 = vmovdqa32_avx512vl(auVar700);
          bVar12 = (bool)(bVar28 >> 1 & 1);
          bVar14 = (bool)(bVar28 >> 2 & 1);
          bVar16 = (bool)(bVar28 >> 3 & 1);
          bVar18 = (bool)(bVar28 >> 4 & 1);
          bVar20 = (bool)(bVar28 >> 5 & 1);
          bVar22 = (bool)(bVar28 >> 6 & 1);
          bVar11 = (bool)((byte)uVar428 & 1);
          bVar13 = (bool)((byte)(uVar428 >> 1) & 1);
          bVar15 = (bool)((byte)(uVar428 >> 2) & 1);
          bVar17 = (bool)((byte)(uVar428 >> 3) & 1);
          bVar19 = (bool)((byte)(uVar428 >> 4) & 1);
          bVar21 = (bool)((byte)(uVar428 >> 5) & 1);
          bVar23 = (bool)((byte)(uVar428 >> 6) & 1);
          bVar24 = SUB81(uVar428 >> 7,0);
          *outptr = (float)(bVar11 * uVar422 |
                           (uint)!bVar11 *
                           ((uint)(bVar28 & 1) * auVar677._0_4_ |
                           (uint)!(bool)(bVar28 & 1) * auVar676._0_4_));
          outptr[1] = (float)(bVar13 * uVar873 |
                             (uint)!bVar13 *
                             ((uint)bVar12 * auVar677._4_4_ | (uint)!bVar12 * auVar676._4_4_));
          outptr[2] = (float)(bVar15 * uVar874 |
                             (uint)!bVar15 *
                             ((uint)bVar14 * auVar677._8_4_ | (uint)!bVar14 * auVar676._8_4_));
          outptr[3] = (float)(bVar17 * uVar875 |
                             (uint)!bVar17 *
                             ((uint)bVar16 * auVar677._12_4_ | (uint)!bVar16 * auVar676._12_4_));
          outptr[4] = (float)(bVar19 * uVar876 |
                             (uint)!bVar19 *
                             ((uint)bVar18 * auVar677._16_4_ | (uint)!bVar18 * auVar676._16_4_));
          outptr[5] = (float)(bVar21 * uVar877 |
                             (uint)!bVar21 *
                             ((uint)bVar20 * auVar677._20_4_ | (uint)!bVar20 * auVar676._20_4_));
          outptr[6] = (float)(bVar23 * uVar878 |
                             (uint)!bVar23 *
                             ((uint)bVar22 * auVar677._24_4_ | (uint)!bVar22 * auVar676._24_4_));
          outptr[7] = (float)(bVar24 * uVar879 |
                             (uint)!bVar24 *
                             ((uint)(bVar28 >> 7) * auVar677._28_4_ |
                             (uint)!(bool)(bVar28 >> 7) * auVar676._28_4_));
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
          outptr = outptr + 8;
          uVar422 = uVar872 + 8;
          iVar421 = uVar872 + 0xf;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if ((int)(uVar422 | 3) < (int)uVar424) {
        auVar951._8_4_ = 0x40490fdb;
        auVar951._0_8_ = 0x40490fdb40490fdb;
        auVar951._12_4_ = 0x40490fdb;
        auVar1213._8_4_ = 0x80000000;
        auVar1213._0_8_ = 0x8000000080000000;
        auVar1213._12_4_ = 0x80000000;
        auVar493 = vpternlogd_avx512vl(auVar1213,auVar462,auVar951,0xea);
        auVar1030._8_4_ = 0x3f800000;
        auVar1030._0_8_ = 0x3f8000003f800000;
        auVar1030._12_4_ = 0x3f800000;
        auVar492 = vdivps_avx(auVar1030,auVar462);
        auVar504 = ZEXT816(0) << 0x40;
        uVar45 = vcmpps_avx512vl(auVar504,auVar493,2);
        uVar46 = vcmpps_avx512vl(auVar462,auVar504,1);
        auVar1214._8_4_ = 0x80000000;
        auVar1214._0_8_ = 0x8000000080000000;
        auVar1214._12_4_ = 0x80000000;
        auVar1278._8_4_ = 0x40490fdb;
        auVar1278._0_8_ = 0x40490fdb40490fdb;
        auVar1278._12_4_ = 0x40490fdb;
        auVar1339._8_4_ = 0x7fffffff;
        auVar1339._0_8_ = 0x7fffffff7fffffff;
        auVar1339._12_4_ = 0x7fffffff;
        auVar1395._8_4_ = 0xbc83a25c;
        auVar1395._0_8_ = 0xbc83a25cbc83a25c;
        auVar1395._12_4_ = 0xbc83a25c;
        auVar1449._8_4_ = 0xbd99b01e;
        auVar1449._0_8_ = 0xbd99b01ebd99b01e;
        auVar1449._12_4_ = 0xbd99b01e;
        auVar1503._8_4_ = 0xbe117200;
        auVar1503._0_8_ = 0xbe117200be117200;
        auVar1503._12_4_ = 0xbe117200;
        auVar1557._8_4_ = 0xbeaaaa53;
        auVar1557._0_8_ = 0xbeaaaa53beaaaa53;
        auVar1557._12_4_ = 0xbeaaaa53;
        auVar1611._8_4_ = 0x3b3ac537;
        auVar1611._0_8_ = 0x3b3ac5373b3ac537;
        auVar1611._12_4_ = 0x3b3ac537;
        auVar1665._8_4_ = 0x3d2edd4e;
        auVar1665._0_8_ = 0x3d2edd4e3d2edd4e;
        auVar1665._12_4_ = 0x3d2edd4e;
        auVar1719._8_4_ = 0x3dd9ed24;
        auVar1719._0_8_ = 0x3dd9ed243dd9ed24;
        auVar1719._12_4_ = 0x3dd9ed24;
        auVar1771._8_4_ = 0x3e4cb974;
        auVar1771._0_8_ = 0x3e4cb9743e4cb974;
        auVar1771._12_4_ = 0x3e4cb974;
        auVar493 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        auVar516 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
        uVar872 = uVar422;
        do {
          auVar496 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr1;
          auVar497 = vmulps_avx512vl(auVar496,auVar492);
          uVar426 = vcmpps_avx512vl(auVar496,auVar504,1);
          auVar498 = vandps_avx512vl(auVar497,auVar1339);
          auVar51._8_4_ = 0xc0490fdb;
          auVar51._0_8_ = 0xc0490fdbc0490fdb;
          auVar51._12_4_ = 0xc0490fdb;
          auVar501 = vblendmps_avx512vl(auVar1278,auVar51);
          bVar11 = (bool)((byte)uVar426 & 1);
          auVar517._0_4_ = (uint)bVar11 * auVar501._0_4_ | (uint)!bVar11 * in_ZMM21._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar517._4_4_ = (uint)bVar11 * auVar501._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar517._8_4_ = (uint)bVar11 * auVar501._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar517._12_4_ = (uint)bVar11 * auVar501._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
          in_ZMM21 = ZEXT1664(auVar517);
          uVar426 = vcmpps_avx512vl(auVar1030,auVar498,1);
          auVar52._8_4_ = 0xbf800000;
          auVar52._0_8_ = 0xbf800000bf800000;
          auVar52._12_4_ = 0xbf800000;
          auVar501 = vblendmps_avx512vl(auVar498,auVar52);
          bVar28 = (byte)uVar426;
          auVar518._0_4_ =
               (uint)(bVar28 & 1) * auVar501._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar518._4_4_ = (uint)bVar11 * auVar501._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar518._8_4_ = (uint)bVar11 * auVar501._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar518._12_4_ = (uint)bVar11 * auVar501._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
          uVar427 = vcmpps_avx512vl(auVar496,auVar504,4);
          auVar498 = vdivps_avx512vl(auVar518,auVar498);
          auVar519._0_4_ =
               (uint)(bVar28 & 1) * auVar498._0_4_ | !(bool)(bVar28 & 1) * auVar518._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar519._4_4_ = (uint)bVar11 * auVar498._4_4_ | !bVar11 * auVar518._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar519._8_4_ = (uint)bVar11 * auVar498._8_4_ | !bVar11 * auVar518._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar519._12_4_ = (uint)bVar11 * auVar498._12_4_ | !bVar11 * auVar518._12_4_;
          in_ZMM22 = ZEXT1664(auVar519);
          auVar498 = vmulps_avx512vl(auVar519,auVar519);
          auVar496 = vandps_avx512vl(auVar496,auVar1214);
          auVar501 = vmulps_avx512vl(auVar498,auVar498);
          auVar502 = vfmadd213ps_avx512vl(auVar1395,auVar501,auVar1449);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar501,auVar1503);
          auVar520 = vfmadd213ps_avx512vl(auVar1611,auVar501,auVar1665);
          auVar520 = vfmadd213ps_avx512vl(auVar520,auVar501,auVar1719);
          auVar502 = vfmadd213ps_avx512vl(auVar502,auVar501,auVar1557);
          auVar520 = vfmadd213ps_avx512vl(auVar520,auVar501,auVar1771);
          auVar501 = vfmadd213ps_avx512vl(auVar520,auVar501,auVar1030);
          auVar498 = vfmadd231ps_avx512vl(auVar501,auVar498,auVar502);
          uVar428 = vcmpps_avx512vl(auVar462,auVar504,4);
          uVar428 = uVar427 & uVar428;
          auVar498 = vmulps_avx512vl(auVar498,auVar519);
          auVar501 = vaddps_avx512vl(auVar498,auVar493);
          auVar521._0_4_ =
               (uint)(bVar28 & 1) * auVar501._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar498._0_4_;
          bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
          auVar521._4_4_ = (uint)bVar11 * auVar501._4_4_ | (uint)!bVar11 * auVar498._4_4_;
          bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
          auVar521._8_4_ = (uint)bVar11 * auVar501._8_4_ | (uint)!bVar11 * auVar498._8_4_;
          bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
          auVar521._12_4_ = (uint)bVar11 * auVar501._12_4_ | (uint)!bVar11 * auVar498._12_4_;
          auVar497 = vpternlogd_avx512vl(auVar521,auVar497,auVar1214,0xf8);
          auVar498 = vaddps_avx512vl(auVar497,auVar517);
          bVar11 = (bool)((byte)uVar46 & 1);
          bVar14 = (bool)((byte)(uVar46 >> 1) & 1);
          bVar17 = (bool)((byte)(uVar46 >> 2) & 1);
          bVar20 = (bool)((byte)(uVar46 >> 3) & 1);
          auVar496 = vorps_avx512vl(auVar496,auVar516);
          auVar522._4_4_ = (uint)((byte)(uVar427 >> 1) & 1) * auVar496._4_4_;
          auVar522._0_4_ = (uint)((byte)uVar427 & 1) * auVar496._0_4_;
          auVar522._8_4_ = (uint)((byte)(uVar427 >> 2) & 1) * auVar496._8_4_;
          auVar522._12_4_ = (uint)((byte)(uVar427 >> 3) & 1) * auVar496._12_4_;
          uVar47 = (ushort)uVar427 | (ushort)uVar45;
          auVar496 = vorps_avx512vl(auVar522,auVar951);
          auVar501 = vmovdqa32_avx512vl(auVar522);
          bVar12 = (bool)((byte)uVar47 & 1);
          bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
          bVar18 = (bool)((byte)(uVar47 >> 2) & 1);
          bVar21 = (bool)((byte)(uVar47 >> 3) & 1);
          bVar13 = (bool)((byte)uVar428 & 1);
          bVar16 = (bool)((byte)(uVar428 >> 1) & 1);
          bVar19 = (bool)((byte)(uVar428 >> 2) & 1);
          bVar22 = (bool)((byte)(uVar428 >> 3) & 1);
          *outptr = (float)((uint)bVar13 *
                            ((uint)bVar11 * auVar498._0_4_ | (uint)!bVar11 * auVar497._0_4_) |
                           (uint)!bVar13 *
                           ((uint)bVar12 * auVar501._0_4_ | (uint)!bVar12 * auVar496._0_4_));
          outptr[1] = (float)((uint)bVar16 *
                              ((uint)bVar14 * auVar498._4_4_ | (uint)!bVar14 * auVar497._4_4_) |
                             (uint)!bVar16 *
                             ((uint)bVar15 * auVar501._4_4_ | (uint)!bVar15 * auVar496._4_4_));
          outptr[2] = (float)((uint)bVar19 *
                              ((uint)bVar17 * auVar498._8_4_ | (uint)!bVar17 * auVar497._8_4_) |
                             (uint)!bVar19 *
                             ((uint)bVar18 * auVar501._8_4_ | (uint)!bVar18 * auVar496._8_4_));
          outptr[3] = (float)((uint)bVar22 *
                              ((uint)bVar20 * auVar498._12_4_ | (uint)!bVar20 * auVar497._12_4_) |
                             (uint)!bVar22 *
                             ((uint)bVar21 * auVar501._12_4_ | (uint)!bVar21 * auVar496._12_4_));
          ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
          outptr = outptr + 4;
          uVar422 = uVar872 + 4;
          iVar421 = uVar872 + 7;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
      }
      if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
        return;
      }
      lVar425 = 0;
      do {
        auVar917._0_4_ = atan2f(*(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4),auVar559._0_4_)
        ;
        outptr[lVar425] = auVar917._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
      return;
    }
    auVar559._0_4_ = *ptr1;
    if (iVar421 == 4) {
      auVar462 = *(undefined1 (*) [16])ptr1;
      auVar730 = ZEXT3264(CONCAT1616(auVar462,auVar462));
LAB_003a990a:
      auVar1003 = auVar730._0_32_;
      auVar730 = vinserti64x4_avx512f(auVar730,auVar1003,1);
    }
    else {
      auVar462 = vpbroadcastd_avx512vl(ZEXT416((uint)auVar559._0_4_));
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
        goto LAB_003a990a;
      }
      uVar880 = auVar462._0_4_;
      auVar1003._4_4_ = uVar880;
      auVar1003._0_4_ = uVar880;
      auVar1003._8_4_ = uVar880;
      auVar1003._12_4_ = uVar880;
      auVar1003._16_4_ = uVar880;
      auVar1003._20_4_ = uVar880;
      auVar1003._24_4_ = uVar880;
      auVar1003._28_4_ = uVar880;
      auVar730 = ZEXT3264(auVar1003);
      if (iVar421 != 0x10) goto LAB_003a990a;
      auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
    }
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      auVar1755 = ZEXT864(0);
      uVar46 = vcmpps_avx512f(auVar730,auVar1755,1);
      auVar712 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
      auVar713 = vbroadcastss_avx512f(ZEXT416(0xc0490fdb));
      bVar11 = (bool)((byte)uVar46 & 1);
      auVar723._0_4_ = (uint)bVar11 * auVar713._0_4_ | (uint)!bVar11 * auVar712._0_4_;
      bVar11 = (bool)((byte)(uVar46 >> 1) & 1);
      auVar723._4_4_ = (uint)bVar11 * auVar713._4_4_ | (uint)!bVar11 * auVar712._4_4_;
      bVar11 = (bool)((byte)(uVar46 >> 2) & 1);
      auVar723._8_4_ = (uint)bVar11 * auVar713._8_4_ | (uint)!bVar11 * auVar712._8_4_;
      bVar11 = (bool)((byte)(uVar46 >> 3) & 1);
      auVar723._12_4_ = (uint)bVar11 * auVar713._12_4_ | (uint)!bVar11 * auVar712._12_4_;
      bVar11 = (bool)((byte)(uVar46 >> 4) & 1);
      auVar723._16_4_ = (uint)bVar11 * auVar713._16_4_ | (uint)!bVar11 * auVar712._16_4_;
      bVar11 = (bool)((byte)(uVar46 >> 5) & 1);
      auVar723._20_4_ = (uint)bVar11 * auVar713._20_4_ | (uint)!bVar11 * auVar712._20_4_;
      bVar11 = (bool)((byte)(uVar46 >> 6) & 1);
      auVar723._24_4_ = (uint)bVar11 * auVar713._24_4_ | (uint)!bVar11 * auVar712._24_4_;
      bVar11 = (bool)((byte)(uVar46 >> 7) & 1);
      auVar723._28_4_ = (uint)bVar11 * auVar713._28_4_ | (uint)!bVar11 * auVar712._28_4_;
      bVar11 = (bool)((byte)(uVar46 >> 8) & 1);
      auVar723._32_4_ = (uint)bVar11 * auVar713._32_4_ | (uint)!bVar11 * auVar712._32_4_;
      bVar11 = (bool)((byte)(uVar46 >> 9) & 1);
      auVar723._36_4_ = (uint)bVar11 * auVar713._36_4_ | (uint)!bVar11 * auVar712._36_4_;
      bVar11 = (bool)((byte)(uVar46 >> 10) & 1);
      auVar723._40_4_ = (uint)bVar11 * auVar713._40_4_ | (uint)!bVar11 * auVar712._40_4_;
      bVar11 = (bool)((byte)(uVar46 >> 0xb) & 1);
      auVar723._44_4_ = (uint)bVar11 * auVar713._44_4_ | (uint)!bVar11 * auVar712._44_4_;
      bVar11 = (bool)((byte)(uVar46 >> 0xc) & 1);
      auVar723._48_4_ = (uint)bVar11 * auVar713._48_4_ | (uint)!bVar11 * auVar712._48_4_;
      bVar11 = (bool)((byte)(uVar46 >> 0xd) & 1);
      auVar723._52_4_ = (uint)bVar11 * auVar713._52_4_ | (uint)!bVar11 * auVar712._52_4_;
      bVar11 = (bool)((byte)(uVar46 >> 0xe) & 1);
      auVar723._56_4_ = (uint)bVar11 * auVar713._56_4_ | (uint)!bVar11 * auVar712._56_4_;
      bVar11 = SUB81(uVar46 >> 0xf,0);
      auVar723._60_4_ = (uint)bVar11 * auVar713._60_4_ | (uint)!bVar11 * auVar712._60_4_;
      auVar712 = vpbroadcastd_avx512f(ZEXT416(0x3fc90fdb));
      auVar722._8_4_ = 0x80000000;
      auVar722._0_8_ = 0x8000000080000000;
      auVar722._12_4_ = 0x80000000;
      auVar722._16_4_ = 0x80000000;
      auVar722._20_4_ = 0x80000000;
      auVar722._24_4_ = 0x80000000;
      auVar722._28_4_ = 0x80000000;
      auVar722._32_4_ = 0x80000000;
      auVar722._36_4_ = 0x80000000;
      auVar722._40_4_ = 0x80000000;
      auVar722._44_4_ = 0x80000000;
      auVar722._48_4_ = 0x80000000;
      auVar722._52_4_ = 0x80000000;
      auVar722._56_4_ = 0x80000000;
      auVar722._60_4_ = 0x80000000;
      auVar712 = vpternlogd_avx512f(auVar712,auVar730,auVar722,0xf8);
      iVar421 = 0xf;
      auVar713 = vpbroadcastd_avx512f(ZEXT416(0x80000000));
      auVar714 = vbroadcastss_avx512f(ZEXT416(0x7fffffff));
      auVar715 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
      auVar716 = vbroadcastss_avx512f(ZEXT416(0xbc83a25c));
      auVar717 = vbroadcastss_avx512f(ZEXT416(0xbd99b01e));
      auVar718 = vbroadcastss_avx512f(ZEXT416(0xbe117200));
      auVar719 = vbroadcastss_avx512f(ZEXT416(0xbeaaaa53));
      auVar720 = vbroadcastss_avx512f(ZEXT416(0x3b3ac537));
      auVar721 = vbroadcastss_avx512f(ZEXT416(0x3d2edd4e));
      auVar722 = vbroadcastss_avx512f(ZEXT416(0x3dd9ed24));
      auVar724 = vbroadcastss_avx512f(ZEXT416(0x3e4cb974));
      auVar725 = vbroadcastss_avx512f(ZEXT416(0x3fc90fdb));
      uVar46 = vcmpps_avx512f(auVar730,auVar1755,4);
      auVar726 = vpbroadcastd_avx512f(ZEXT416(0x40490fdb));
      do {
        auVar732 = *(undefined1 (*) [64])ptr;
        auVar845 = vdivps_avx512f(auVar730,auVar732);
        auVar729 = vandps_avx512dq(auVar845,auVar714);
        uVar426 = vcmpps_avx512f(auVar715,auVar729,1);
        auVar324._8_4_ = 0xbf800000;
        auVar324._0_8_ = 0xbf800000bf800000;
        auVar324._12_4_ = 0xbf800000;
        auVar324._16_4_ = 0xbf800000;
        auVar324._20_4_ = 0xbf800000;
        auVar324._24_4_ = 0xbf800000;
        auVar324._28_4_ = 0xbf800000;
        auVar324._32_4_ = 0xbf800000;
        auVar324._36_4_ = 0xbf800000;
        auVar324._40_4_ = 0xbf800000;
        auVar324._44_4_ = 0xbf800000;
        auVar324._48_4_ = 0xbf800000;
        auVar324._52_4_ = 0xbf800000;
        auVar324._56_4_ = 0xbf800000;
        auVar324._60_4_ = 0xbf800000;
        auVar727 = vblendmps_avx512f(auVar729,auVar324);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar846._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * in_ZMM22._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar846._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar846._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar846._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar846._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar846._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar846._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
        bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
        auVar846._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
        bVar28 = (byte)(uVar426 >> 8);
        bVar11 = (bool)(bVar28 & 1);
        auVar846._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * in_ZMM22._32_4_;
        bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
        auVar846._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * in_ZMM22._36_4_;
        bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
        auVar846._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * in_ZMM22._40_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
        auVar846._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * in_ZMM22._44_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
        auVar846._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * in_ZMM22._48_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
        auVar846._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * in_ZMM22._52_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
        auVar846._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * in_ZMM22._56_4_;
        bVar11 = SUB81(uVar426 >> 0xf,0);
        auVar846._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * in_ZMM22._60_4_;
        auVar729 = vmaxps_avx512f(auVar729,auVar715);
        auVar729 = vdivps_avx512f(auVar846,auVar729);
        in_ZMM22 = vmulps_avx512f(auVar729,auVar729);
        uVar427 = vcmpps_avx512f(auVar732,auVar1755,4);
        auVar727 = vmulps_avx512f(in_ZMM22,in_ZMM22);
        auVar728 = vfmadd213ps_avx512f(auVar716,auVar727,auVar717);
        auVar728 = vfmadd213ps_avx512f(auVar728,auVar727,auVar718);
        auVar731 = vfmadd213ps_avx512f(auVar720,auVar727,auVar721);
        auVar731 = vfmadd213ps_avx512f(auVar731,auVar727,auVar722);
        auVar728 = vfmadd213ps_avx512f(auVar728,auVar727,auVar719);
        auVar731 = vfmadd213ps_avx512f(auVar731,auVar727,auVar724);
        auVar727 = vfmadd213ps_avx512f(auVar731,auVar727,auVar715);
        auVar727 = vfmadd231ps_avx512f(auVar727,in_ZMM22,auVar728);
        uVar428 = vcmpps_avx512f(auVar732,auVar1755,1);
        auVar729 = vmulps_avx512f(auVar727,auVar729);
        auVar727 = vaddps_avx512f(auVar729,auVar725);
        bVar11 = (bool)((byte)uVar426 & 1);
        auVar847._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar729._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar847._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar729._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar847._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar729._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar847._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar729._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar847._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar729._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar847._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar729._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar847._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar729._24_4_;
        bVar11 = (bool)((byte)(uVar426 >> 7) & 1);
        auVar847._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar729._28_4_;
        bVar11 = (bool)(bVar28 & 1);
        auVar847._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar729._32_4_;
        bVar11 = (bool)((byte)(uVar426 >> 9) & 1);
        auVar847._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar729._36_4_;
        bVar11 = (bool)((byte)(uVar426 >> 10) & 1);
        auVar847._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar729._40_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xb) & 1);
        auVar847._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar729._44_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xc) & 1);
        auVar847._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar729._48_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xd) & 1);
        auVar847._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar729._52_4_;
        bVar11 = (bool)((byte)(uVar426 >> 0xe) & 1);
        auVar847._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar729._56_4_;
        bVar11 = SUB81(uVar426 >> 0xf,0);
        auVar847._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar729._60_4_;
        auVar732 = vpternlogd_avx512f(auVar732,auVar713,auVar726,0xea);
        auVar729 = vpternlogd_avx512f(auVar847,auVar845,auVar713,0xf8);
        uVar426 = vcmpps_avx512f(auVar732,auVar1755,1);
        auVar732 = vbroadcastss_avx512f(ZEXT416(0x40490fdb));
        auVar727 = vaddps_avx512f(auVar729,auVar723);
        bVar11 = (bool)((byte)uVar428 & 1);
        in_ZMM21._0_4_ = (uint)bVar11 * auVar727._0_4_ | (uint)!bVar11 * auVar729._0_4_;
        bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
        in_ZMM21._4_4_ = (uint)bVar11 * auVar727._4_4_ | (uint)!bVar11 * auVar729._4_4_;
        bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
        in_ZMM21._8_4_ = (uint)bVar11 * auVar727._8_4_ | (uint)!bVar11 * auVar729._8_4_;
        bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
        in_ZMM21._12_4_ = (uint)bVar11 * auVar727._12_4_ | (uint)!bVar11 * auVar729._12_4_;
        bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
        in_ZMM21._16_4_ = (uint)bVar11 * auVar727._16_4_ | (uint)!bVar11 * auVar729._16_4_;
        bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
        in_ZMM21._20_4_ = (uint)bVar11 * auVar727._20_4_ | (uint)!bVar11 * auVar729._20_4_;
        bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
        in_ZMM21._24_4_ = (uint)bVar11 * auVar727._24_4_ | (uint)!bVar11 * auVar729._24_4_;
        bVar11 = (bool)((byte)(uVar428 >> 7) & 1);
        in_ZMM21._28_4_ = (uint)bVar11 * auVar727._28_4_ | (uint)!bVar11 * auVar729._28_4_;
        bVar11 = (bool)((byte)(uVar428 >> 8) & 1);
        in_ZMM21._32_4_ = (uint)bVar11 * auVar727._32_4_ | (uint)!bVar11 * auVar729._32_4_;
        bVar11 = (bool)((byte)(uVar428 >> 9) & 1);
        in_ZMM21._36_4_ = (uint)bVar11 * auVar727._36_4_ | (uint)!bVar11 * auVar729._36_4_;
        bVar11 = (bool)((byte)(uVar428 >> 10) & 1);
        in_ZMM21._40_4_ = (uint)bVar11 * auVar727._40_4_ | (uint)!bVar11 * auVar729._40_4_;
        bVar11 = (bool)((byte)(uVar428 >> 0xb) & 1);
        in_ZMM21._44_4_ = (uint)bVar11 * auVar727._44_4_ | (uint)!bVar11 * auVar729._44_4_;
        bVar11 = (bool)((byte)(uVar428 >> 0xc) & 1);
        in_ZMM21._48_4_ = (uint)bVar11 * auVar727._48_4_ | (uint)!bVar11 * auVar729._48_4_;
        bVar11 = (bool)((byte)(uVar428 >> 0xd) & 1);
        in_ZMM21._52_4_ = (uint)bVar11 * auVar727._52_4_ | (uint)!bVar11 * auVar729._52_4_;
        bVar11 = (bool)((byte)(uVar428 >> 0xe) & 1);
        in_ZMM21._56_4_ = (uint)bVar11 * auVar727._56_4_ | (uint)!bVar11 * auVar729._56_4_;
        bVar11 = SUB81(uVar428 >> 0xf,0);
        in_ZMM21._60_4_ = (uint)bVar11 * auVar727._60_4_ | (uint)!bVar11 * auVar729._60_4_;
        auVar729 = vblendmps_avx512f(auVar712,in_ZMM21);
        bVar11 = (bool)((byte)uVar427 & 1);
        bVar13 = (bool)((byte)(uVar427 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar427 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar427 >> 3) & 1);
        bVar19 = (bool)((byte)(uVar427 >> 4) & 1);
        bVar21 = (bool)((byte)(uVar427 >> 5) & 1);
        bVar23 = (bool)((byte)(uVar427 >> 6) & 1);
        bVar25 = (bool)((byte)(uVar427 >> 7) & 1);
        bVar27 = (bool)((byte)(uVar427 >> 8) & 1);
        bVar30 = (bool)((byte)(uVar427 >> 9) & 1);
        bVar32 = (bool)((byte)(uVar427 >> 10) & 1);
        bVar34 = (bool)((byte)(uVar427 >> 0xb) & 1);
        bVar36 = (bool)((byte)(uVar427 >> 0xc) & 1);
        bVar38 = (bool)((byte)(uVar427 >> 0xd) & 1);
        bVar40 = (bool)((byte)(uVar427 >> 0xe) & 1);
        bVar42 = SUB81(uVar427 >> 0xf,0);
        bVar12 = (bool)((byte)uVar46 & 1);
        bVar14 = (bool)((byte)(uVar46 >> 1) & 1);
        bVar16 = (bool)((byte)(uVar46 >> 2) & 1);
        bVar18 = (bool)((byte)(uVar46 >> 3) & 1);
        bVar20 = (bool)((byte)(uVar46 >> 4) & 1);
        bVar22 = (bool)((byte)(uVar46 >> 5) & 1);
        bVar24 = (bool)((byte)(uVar46 >> 6) & 1);
        bVar26 = (bool)((byte)(uVar46 >> 7) & 1);
        bVar29 = (bool)((byte)(uVar46 >> 8) & 1);
        bVar31 = (bool)((byte)(uVar46 >> 9) & 1);
        bVar33 = (bool)((byte)(uVar46 >> 10) & 1);
        bVar35 = (bool)((byte)(uVar46 >> 0xb) & 1);
        bVar37 = (bool)((byte)(uVar46 >> 0xc) & 1);
        bVar39 = (bool)((byte)(uVar46 >> 0xd) & 1);
        bVar41 = (bool)((byte)(uVar46 >> 0xe) & 1);
        bVar43 = SUB81(uVar46 >> 0xf,0);
        *outptr = (float)((uint)bVar12 *
                          ((uint)bVar11 * auVar729._0_4_ | (uint)!bVar11 * auVar845._0_4_) |
                         (uint)!bVar12 * (uint)((byte)uVar426 & 1) * auVar732._0_4_);
        outptr[1] = (float)((uint)bVar14 *
                            ((uint)bVar13 * auVar729._4_4_ | (uint)!bVar13 * auVar845._4_4_) |
                           (uint)!bVar14 * (uint)((byte)(uVar426 >> 1) & 1) * auVar732._4_4_);
        outptr[2] = (float)((uint)bVar16 *
                            ((uint)bVar15 * auVar729._8_4_ | (uint)!bVar15 * auVar845._8_4_) |
                           (uint)!bVar16 * (uint)((byte)(uVar426 >> 2) & 1) * auVar732._8_4_);
        outptr[3] = (float)((uint)bVar18 *
                            ((uint)bVar17 * auVar729._12_4_ | (uint)!bVar17 * auVar845._12_4_) |
                           (uint)!bVar18 * (uint)((byte)(uVar426 >> 3) & 1) * auVar732._12_4_);
        outptr[4] = (float)((uint)bVar20 *
                            ((uint)bVar19 * auVar729._16_4_ | (uint)!bVar19 * auVar845._16_4_) |
                           (uint)!bVar20 * (uint)((byte)(uVar426 >> 4) & 1) * auVar732._16_4_);
        outptr[5] = (float)((uint)bVar22 *
                            ((uint)bVar21 * auVar729._20_4_ | (uint)!bVar21 * auVar845._20_4_) |
                           (uint)!bVar22 * (uint)((byte)(uVar426 >> 5) & 1) * auVar732._20_4_);
        outptr[6] = (float)((uint)bVar24 *
                            ((uint)bVar23 * auVar729._24_4_ | (uint)!bVar23 * auVar845._24_4_) |
                           (uint)!bVar24 * (uint)((byte)(uVar426 >> 6) & 1) * auVar732._24_4_);
        outptr[7] = (float)((uint)bVar26 *
                            ((uint)bVar25 * auVar729._28_4_ | (uint)!bVar25 * auVar845._28_4_) |
                           (uint)!bVar26 * (uint)((byte)(uVar426 >> 7) & 1) * auVar732._28_4_);
        outptr[8] = (float)((uint)bVar29 *
                            ((uint)bVar27 * auVar729._32_4_ | (uint)!bVar27 * auVar845._32_4_) |
                           (uint)!bVar29 * (uint)((byte)(uVar426 >> 8) & 1) * auVar732._32_4_);
        outptr[9] = (float)((uint)bVar31 *
                            ((uint)bVar30 * auVar729._36_4_ | (uint)!bVar30 * auVar845._36_4_) |
                           (uint)!bVar31 * (uint)((byte)(uVar426 >> 9) & 1) * auVar732._36_4_);
        outptr[10] = (float)((uint)bVar33 *
                             ((uint)bVar32 * auVar729._40_4_ | (uint)!bVar32 * auVar845._40_4_) |
                            (uint)!bVar33 * (uint)((byte)(uVar426 >> 10) & 1) * auVar732._40_4_);
        outptr[0xb] = (float)((uint)bVar35 *
                              ((uint)bVar34 * auVar729._44_4_ | (uint)!bVar34 * auVar845._44_4_) |
                             (uint)!bVar35 * (uint)((byte)(uVar426 >> 0xb) & 1) * auVar732._44_4_);
        outptr[0xc] = (float)((uint)bVar37 *
                              ((uint)bVar36 * auVar729._48_4_ | (uint)!bVar36 * auVar845._48_4_) |
                             (uint)!bVar37 * (uint)((byte)(uVar426 >> 0xc) & 1) * auVar732._48_4_);
        outptr[0xd] = (float)((uint)bVar39 *
                              ((uint)bVar38 * auVar729._52_4_ | (uint)!bVar38 * auVar845._52_4_) |
                             (uint)!bVar39 * (uint)((byte)(uVar426 >> 0xd) & 1) * auVar732._52_4_);
        outptr[0xe] = (float)((uint)bVar41 *
                              ((uint)bVar40 * auVar729._56_4_ | (uint)!bVar40 * auVar845._56_4_) |
                             (uint)!bVar41 * (uint)((byte)(uVar426 >> 0xe) & 1) * auVar732._56_4_);
        outptr[0xf] = (float)((uint)bVar43 *
                              ((uint)bVar42 * auVar729._60_4_ | (uint)!bVar42 * auVar845._60_4_) |
                             (uint)!bVar43 * (uint)(byte)(uVar426 >> 0xf) * auVar732._60_4_);
        ptr = (float *)((long)ptr + 0x40);
        outptr = outptr + 0x10;
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
    }
    if ((int)(uVar422 | 7) < (int)uVar424) {
      auVar492 = ZEXT816(0) << 0x40;
      auVar167._8_4_ = 0x80000000;
      auVar167._0_8_ = 0x8000000080000000;
      auVar167._12_4_ = 0x80000000;
      auVar167._16_4_ = 0x80000000;
      auVar167._20_4_ = 0x80000000;
      auVar167._24_4_ = 0x80000000;
      auVar167._28_4_ = 0x80000000;
      auVar671 = vpandd_avx512vl(auVar1003,auVar167);
      uVar46 = vcmpps_avx512vl(auVar1003,ZEXT1632(auVar492),4);
      uVar426 = vcmpps_avx512vl(auVar1003,ZEXT1632(auVar492),1);
      auVar672 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
      bVar11 = (bool)((byte)uVar426 & 1);
      auVar673._0_4_ = (uint)bVar11 * auVar672._0_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
      auVar673._4_4_ = (uint)bVar11 * auVar672._4_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
      auVar673._8_4_ = (uint)bVar11 * auVar672._8_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
      auVar673._12_4_ = (uint)bVar11 * auVar672._12_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
      auVar673._16_4_ = (uint)bVar11 * auVar672._16_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
      auVar673._20_4_ = (uint)bVar11 * auVar672._20_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
      auVar673._24_4_ = (uint)bVar11 * auVar672._24_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = SUB81(uVar426 >> 7,0);
      auVar673._28_4_ = (uint)bVar11 * auVar672._28_4_ | (uint)!bVar11 * 0x40490fdb;
      auVar168._8_4_ = 0x3fc90fdb;
      auVar168._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar168._12_4_ = 0x3fc90fdb;
      auVar168._16_4_ = 0x3fc90fdb;
      auVar168._20_4_ = 0x3fc90fdb;
      auVar168._24_4_ = 0x3fc90fdb;
      auVar168._28_4_ = 0x3fc90fdb;
      auVar671 = vpord_avx512vl(auVar671,auVar168);
      auVar674._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar671._4_4_;
      auVar674._0_4_ = (uint)((byte)uVar46 & 1) * auVar671._0_4_;
      auVar674._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar671._8_4_;
      auVar674._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar671._12_4_;
      auVar674._16_4_ = (uint)((byte)(uVar46 >> 4) & 1) * auVar671._16_4_;
      auVar674._20_4_ = (uint)((byte)(uVar46 >> 5) & 1) * auVar671._20_4_;
      auVar674._24_4_ = (uint)((byte)(uVar46 >> 6) & 1) * auVar671._24_4_;
      auVar674._28_4_ = (uint)(byte)(uVar46 >> 7) * auVar671._28_4_;
      auVar1253._8_4_ = 0x80000000;
      auVar1253._0_8_ = 0x8000000080000000;
      auVar1253._12_4_ = 0x80000000;
      auVar1253._16_4_ = 0x80000000;
      auVar1253._20_4_ = 0x80000000;
      auVar1253._24_4_ = 0x80000000;
      auVar1253._28_4_ = 0x80000000;
      auVar1313._8_4_ = 0x7fffffff;
      auVar1313._0_8_ = 0x7fffffff7fffffff;
      auVar1313._12_4_ = 0x7fffffff;
      auVar1313._16_4_ = 0x7fffffff;
      auVar1313._20_4_ = 0x7fffffff;
      auVar1313._24_4_ = 0x7fffffff;
      auVar1313._28_4_ = 0x7fffffff;
      auVar1369._8_4_ = 0x3f800000;
      auVar1369._0_8_ = 0x3f8000003f800000;
      auVar1369._12_4_ = 0x3f800000;
      auVar1369._16_4_ = 0x3f800000;
      auVar1369._20_4_ = 0x3f800000;
      auVar1369._24_4_ = 0x3f800000;
      auVar1369._28_4_ = 0x3f800000;
      auVar1426._8_4_ = 0xbc83a25c;
      auVar1426._0_8_ = 0xbc83a25cbc83a25c;
      auVar1426._12_4_ = 0xbc83a25c;
      auVar1426._16_4_ = 0xbc83a25c;
      auVar1426._20_4_ = 0xbc83a25c;
      auVar1426._24_4_ = 0xbc83a25c;
      auVar1426._28_4_ = 0xbc83a25c;
      auVar1480._8_4_ = 0xbd99b01e;
      auVar1480._0_8_ = 0xbd99b01ebd99b01e;
      auVar1480._12_4_ = 0xbd99b01e;
      auVar1480._16_4_ = 0xbd99b01e;
      auVar1480._20_4_ = 0xbd99b01e;
      auVar1480._24_4_ = 0xbd99b01e;
      auVar1480._28_4_ = 0xbd99b01e;
      auVar1534._8_4_ = 0xbe117200;
      auVar1534._0_8_ = 0xbe117200be117200;
      auVar1534._12_4_ = 0xbe117200;
      auVar1534._16_4_ = 0xbe117200;
      auVar1534._20_4_ = 0xbe117200;
      auVar1534._24_4_ = 0xbe117200;
      auVar1534._28_4_ = 0xbe117200;
      auVar1588._8_4_ = 0xbeaaaa53;
      auVar1588._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1588._12_4_ = 0xbeaaaa53;
      auVar1588._16_4_ = 0xbeaaaa53;
      auVar1588._20_4_ = 0xbeaaaa53;
      auVar1588._24_4_ = 0xbeaaaa53;
      auVar1588._28_4_ = 0xbeaaaa53;
      auVar1642._8_4_ = 0x3b3ac537;
      auVar1642._0_8_ = 0x3b3ac5373b3ac537;
      auVar1642._12_4_ = 0x3b3ac537;
      auVar1642._16_4_ = 0x3b3ac537;
      auVar1642._20_4_ = 0x3b3ac537;
      auVar1642._24_4_ = 0x3b3ac537;
      auVar1642._28_4_ = 0x3b3ac537;
      auVar1696._8_4_ = 0x3d2edd4e;
      auVar1696._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1696._12_4_ = 0x3d2edd4e;
      auVar1696._16_4_ = 0x3d2edd4e;
      auVar1696._20_4_ = 0x3d2edd4e;
      auVar1696._24_4_ = 0x3d2edd4e;
      auVar1696._28_4_ = 0x3d2edd4e;
      auVar1747._8_4_ = 0x3dd9ed24;
      auVar1747._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1747._12_4_ = 0x3dd9ed24;
      auVar1747._16_4_ = 0x3dd9ed24;
      auVar1747._20_4_ = 0x3dd9ed24;
      auVar1747._24_4_ = 0x3dd9ed24;
      auVar1747._28_4_ = 0x3dd9ed24;
      auVar1797._8_4_ = 0x3e4cb974;
      auVar1797._0_8_ = 0x3e4cb9743e4cb974;
      auVar1797._12_4_ = 0x3e4cb974;
      auVar1797._16_4_ = 0x3e4cb974;
      auVar1797._20_4_ = 0x3e4cb974;
      auVar1797._24_4_ = 0x3e4cb974;
      auVar1797._28_4_ = 0x3e4cb974;
      auVar671 = vbroadcastss_avx512vl(ZEXT416(0x3fc90fdb));
      auVar672 = vpbroadcastd_avx512vl(ZEXT416(0x40490fdb));
      auVar675 = vpord_avx512vl(auVar674,auVar672);
      uVar872 = uVar422;
      do {
        auVar684 = *(undefined1 (*) [32])*(undefined1 (*) [64])ptr;
        auVar676 = vdivps_avx512vl(auVar1003,auVar684);
        vandps_avx512vl(auVar676,auVar1313);
        uVar426 = vcmpps_avx512vl(auVar1369,auVar676,1);
        auVar169._8_4_ = 0xbf800000;
        auVar169._0_8_ = 0xbf800000bf800000;
        auVar169._12_4_ = 0xbf800000;
        auVar169._16_4_ = 0xbf800000;
        auVar169._20_4_ = 0xbf800000;
        auVar169._24_4_ = 0xbf800000;
        auVar169._28_4_ = 0xbf800000;
        auVar677 = vblendmps_avx512vl(auVar676,auVar169);
        bVar28 = (byte)uVar426;
        auVar678._0_4_ =
             (uint)(bVar28 & 1) * auVar677._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM22._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar678._4_4_ = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * in_ZMM22._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar678._8_4_ = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * in_ZMM22._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar678._12_4_ = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * in_ZMM22._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar678._16_4_ = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * in_ZMM22._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar678._20_4_ = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * in_ZMM22._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar678._24_4_ = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * in_ZMM22._24_4_;
        bVar11 = SUB81(uVar426 >> 7,0);
        auVar678._28_4_ = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * in_ZMM22._28_4_;
        auVar677 = vdivps_avx512vl(auVar678,auVar676);
        auVar679._0_4_ = (uint)(bVar28 & 1) * auVar677._0_4_ | !(bool)(bVar28 & 1) * auVar678._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar679._4_4_ = (uint)bVar11 * auVar677._4_4_ | !bVar11 * auVar678._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar679._8_4_ = (uint)bVar11 * auVar677._8_4_ | !bVar11 * auVar678._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar679._12_4_ = (uint)bVar11 * auVar677._12_4_ | !bVar11 * auVar678._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar679._16_4_ = (uint)bVar11 * auVar677._16_4_ | !bVar11 * auVar678._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar679._20_4_ = (uint)bVar11 * auVar677._20_4_ | !bVar11 * auVar678._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar679._24_4_ = (uint)bVar11 * auVar677._24_4_ | !bVar11 * auVar678._24_4_;
        bVar11 = SUB81(uVar426 >> 7,0);
        auVar679._28_4_ = (uint)bVar11 * auVar677._28_4_ | !bVar11 * auVar678._28_4_;
        in_ZMM22 = ZEXT3264(auVar679);
        auVar677 = vmulps_avx512vl(auVar679,auVar679);
        auVar680 = vmulps_avx512vl(auVar677,auVar677);
        auVar562 = ZEXT1632(auVar492);
        uVar427 = vcmpps_avx512vl(auVar684,auVar562,4);
        uVar427 = uVar46 & uVar427;
        auVar681 = vfmadd213ps_avx512vl(auVar1426,auVar680,auVar1480);
        auVar681 = vfmadd213ps_avx512vl(auVar681,auVar680,auVar1534);
        auVar682 = vfmadd213ps_avx512vl(auVar1642,auVar680,auVar1696);
        auVar682 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1747);
        auVar682 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1797);
        auVar681 = vfmadd213ps_avx512vl(auVar681,auVar680,auVar1588);
        auVar680 = vfmadd213ps_avx512vl(auVar682,auVar680,auVar1369);
        auVar677 = vfmadd231ps_avx512vl(auVar680,auVar677,auVar681);
        auVar677 = vmulps_avx512vl(auVar677,auVar679);
        uVar428 = vcmpps_avx512vl(auVar684,auVar562,1);
        auVar680 = vaddps_avx512vl(auVar677,auVar671);
        auVar683._0_4_ =
             (uint)(bVar28 & 1) * auVar680._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar677._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar683._4_4_ = (uint)bVar11 * auVar680._4_4_ | (uint)!bVar11 * auVar677._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar683._8_4_ = (uint)bVar11 * auVar680._8_4_ | (uint)!bVar11 * auVar677._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar683._12_4_ = (uint)bVar11 * auVar680._12_4_ | (uint)!bVar11 * auVar677._12_4_;
        bVar11 = (bool)((byte)(uVar426 >> 4) & 1);
        auVar683._16_4_ = (uint)bVar11 * auVar680._16_4_ | (uint)!bVar11 * auVar677._16_4_;
        bVar11 = (bool)((byte)(uVar426 >> 5) & 1);
        auVar683._20_4_ = (uint)bVar11 * auVar680._20_4_ | (uint)!bVar11 * auVar677._20_4_;
        bVar11 = (bool)((byte)(uVar426 >> 6) & 1);
        auVar683._24_4_ = (uint)bVar11 * auVar680._24_4_ | (uint)!bVar11 * auVar677._24_4_;
        bVar11 = SUB81(uVar426 >> 7,0);
        auVar683._28_4_ = (uint)bVar11 * auVar680._28_4_ | (uint)!bVar11 * auVar677._28_4_;
        auVar676 = vpternlogd_avx512vl(auVar683,auVar676,auVar1253,0xf8);
        auVar684 = vpternlogd_avx512vl(auVar684,auVar672,auVar1253,0xec);
        auVar677 = vaddps_avx512vl(auVar676,auVar673);
        bVar11 = (bool)((byte)uVar428 & 1);
        uVar422 = (uint)bVar11 * auVar677._0_4_ | (uint)!bVar11 * auVar676._0_4_;
        bVar11 = (bool)((byte)(uVar428 >> 1) & 1);
        uVar873 = (uint)bVar11 * auVar677._4_4_ | (uint)!bVar11 * auVar676._4_4_;
        bVar11 = (bool)((byte)(uVar428 >> 2) & 1);
        uVar874 = (uint)bVar11 * auVar677._8_4_ | (uint)!bVar11 * auVar676._8_4_;
        bVar11 = (bool)((byte)(uVar428 >> 3) & 1);
        uVar875 = (uint)bVar11 * auVar677._12_4_ | (uint)!bVar11 * auVar676._12_4_;
        bVar11 = (bool)((byte)(uVar428 >> 4) & 1);
        uVar876 = (uint)bVar11 * auVar677._16_4_ | (uint)!bVar11 * auVar676._16_4_;
        bVar11 = (bool)((byte)(uVar428 >> 5) & 1);
        uVar877 = (uint)bVar11 * auVar677._20_4_ | (uint)!bVar11 * auVar676._20_4_;
        bVar11 = (bool)((byte)(uVar428 >> 6) & 1);
        uVar878 = (uint)bVar11 * auVar677._24_4_ | (uint)!bVar11 * auVar676._24_4_;
        bVar11 = SUB81(uVar428 >> 7,0);
        uVar879 = (uint)bVar11 * auVar677._28_4_ | (uint)!bVar11 * auVar676._28_4_;
        in_ZMM21 = ZEXT3264(CONCAT428(uVar879,CONCAT424(uVar878,CONCAT420(uVar877,CONCAT416(uVar876,
                                                  CONCAT412(uVar875,CONCAT48(uVar874,CONCAT44(
                                                  uVar873,uVar422))))))));
        uVar45 = vcmpps_avx512vl(auVar562,auVar684,2);
        bVar28 = (byte)uVar46 | (byte)uVar45;
        auVar676 = vpblendmd_avx512vl(auVar675,auVar674);
        bVar12 = (bool)(bVar28 >> 1 & 1);
        bVar14 = (bool)(bVar28 >> 2 & 1);
        bVar16 = (bool)(bVar28 >> 3 & 1);
        bVar18 = (bool)(bVar28 >> 4 & 1);
        bVar20 = (bool)(bVar28 >> 5 & 1);
        bVar22 = (bool)(bVar28 >> 6 & 1);
        bVar11 = (bool)((byte)uVar427 & 1);
        bVar13 = (bool)((byte)(uVar427 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar427 >> 2) & 1);
        bVar17 = (bool)((byte)(uVar427 >> 3) & 1);
        bVar19 = (bool)((byte)(uVar427 >> 4) & 1);
        bVar21 = (bool)((byte)(uVar427 >> 5) & 1);
        bVar23 = (bool)((byte)(uVar427 >> 6) & 1);
        bVar24 = SUB81(uVar427 >> 7,0);
        *outptr = (float)(bVar11 * uVar422 |
                         (uint)!bVar11 *
                         ((uint)(bVar28 & 1) * auVar676._0_4_ |
                         (uint)!(bool)(bVar28 & 1) * auVar684._0_4_));
        outptr[1] = (float)(bVar13 * uVar873 |
                           (uint)!bVar13 *
                           ((uint)bVar12 * auVar676._4_4_ | (uint)!bVar12 * auVar684._4_4_));
        outptr[2] = (float)(bVar15 * uVar874 |
                           (uint)!bVar15 *
                           ((uint)bVar14 * auVar676._8_4_ | (uint)!bVar14 * auVar684._8_4_));
        outptr[3] = (float)(bVar17 * uVar875 |
                           (uint)!bVar17 *
                           ((uint)bVar16 * auVar676._12_4_ | (uint)!bVar16 * auVar684._12_4_));
        outptr[4] = (float)(bVar19 * uVar876 |
                           (uint)!bVar19 *
                           ((uint)bVar18 * auVar676._16_4_ | (uint)!bVar18 * auVar684._16_4_));
        outptr[5] = (float)(bVar21 * uVar877 |
                           (uint)!bVar21 *
                           ((uint)bVar20 * auVar676._20_4_ | (uint)!bVar20 * auVar684._20_4_));
        outptr[6] = (float)(bVar23 * uVar878 |
                           (uint)!bVar23 *
                           ((uint)bVar22 * auVar676._24_4_ | (uint)!bVar22 * auVar684._24_4_));
        outptr[7] = (float)(bVar24 * uVar879 |
                           (uint)!bVar24 *
                           ((uint)(bVar28 >> 7) * auVar676._28_4_ |
                           (uint)!(bool)(bVar28 >> 7) * auVar684._28_4_));
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        outptr = outptr + 8;
        uVar422 = uVar872 + 8;
        iVar421 = uVar872 + 0xf;
        uVar872 = uVar422;
      } while (iVar421 < (int)uVar424);
    }
    if ((int)(uVar422 | 3) < (int)uVar424) {
      auVar516 = ZEXT816(0) << 0x40;
      auVar48._8_4_ = 0x80000000;
      auVar48._0_8_ = 0x8000000080000000;
      auVar48._12_4_ = 0x80000000;
      auVar492 = vpandd_avx512vl(auVar462,auVar48);
      uVar46 = vcmpps_avx512vl(auVar462,auVar516,4);
      uVar426 = vcmpps_avx512vl(auVar462,auVar516,1);
      auVar493 = vbroadcastss_avx512vl(ZEXT416(0xc0490fdb));
      bVar11 = (bool)((byte)uVar426 & 1);
      auVar494._0_4_ = (uint)bVar11 * auVar493._0_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
      auVar494._4_4_ = (uint)bVar11 * auVar493._4_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
      auVar494._8_4_ = (uint)bVar11 * auVar493._8_4_ | (uint)!bVar11 * 0x40490fdb;
      bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
      auVar494._12_4_ = (uint)bVar11 * auVar493._12_4_ | (uint)!bVar11 * 0x40490fdb;
      auVar49._8_4_ = 0x3fc90fdb;
      auVar49._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar49._12_4_ = 0x3fc90fdb;
      auVar492 = vpord_avx512vl(auVar492,auVar49);
      auVar495._4_4_ = (uint)((byte)(uVar46 >> 1) & 1) * auVar492._4_4_;
      auVar495._0_4_ = (uint)((byte)uVar46 & 1) * auVar492._0_4_;
      auVar495._8_4_ = (uint)((byte)(uVar46 >> 2) & 1) * auVar492._8_4_;
      auVar495._12_4_ = (uint)((byte)(uVar46 >> 3) & 1) * auVar492._12_4_;
      auVar1158._8_4_ = 0x80000000;
      auVar1158._0_8_ = 0x8000000080000000;
      auVar1158._12_4_ = 0x80000000;
      auVar1208._8_4_ = 0x7fffffff;
      auVar1208._0_8_ = 0x7fffffff7fffffff;
      auVar1208._12_4_ = 0x7fffffff;
      auVar1272._8_4_ = 0x3f800000;
      auVar1272._0_8_ = 0x3f8000003f800000;
      auVar1272._12_4_ = 0x3f800000;
      auVar1335._8_4_ = 0xbc83a25c;
      auVar1335._0_8_ = 0xbc83a25cbc83a25c;
      auVar1335._12_4_ = 0xbc83a25c;
      auVar1391._8_4_ = 0xbd99b01e;
      auVar1391._0_8_ = 0xbd99b01ebd99b01e;
      auVar1391._12_4_ = 0xbd99b01e;
      auVar1445._8_4_ = 0xbe117200;
      auVar1445._0_8_ = 0xbe117200be117200;
      auVar1445._12_4_ = 0xbe117200;
      auVar1499._8_4_ = 0xbeaaaa53;
      auVar1499._0_8_ = 0xbeaaaa53beaaaa53;
      auVar1499._12_4_ = 0xbeaaaa53;
      auVar1553._8_4_ = 0x3b3ac537;
      auVar1553._0_8_ = 0x3b3ac5373b3ac537;
      auVar1553._12_4_ = 0x3b3ac537;
      auVar1607._8_4_ = 0x3d2edd4e;
      auVar1607._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar1607._12_4_ = 0x3d2edd4e;
      auVar1661._8_4_ = 0x3dd9ed24;
      auVar1661._0_8_ = 0x3dd9ed243dd9ed24;
      auVar1661._12_4_ = 0x3dd9ed24;
      auVar1715._8_4_ = 0x3e4cb974;
      auVar1715._0_8_ = 0x3e4cb9743e4cb974;
      auVar1715._12_4_ = 0x3e4cb974;
      auVar1768._8_4_ = 0x3fc90fdb;
      auVar1768._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar1768._12_4_ = 0x3fc90fdb;
      auVar492 = vpbroadcastd_avx512vl(ZEXT416(0x40490fdb));
      auVar493 = vpord_avx512vl(auVar495,auVar492);
      uVar872 = uVar422;
      do {
        auVar504 = *(undefined1 (*) [16])*(undefined1 (*) [64])ptr;
        auVar496 = vdivps_avx512vl(auVar462,auVar504);
        auVar497 = vandps_avx512vl(auVar496,auVar1208);
        uVar426 = vcmpps_avx512vl(auVar1272,auVar497,1);
        auVar50._8_4_ = 0xbf800000;
        auVar50._0_8_ = 0xbf800000bf800000;
        auVar50._12_4_ = 0xbf800000;
        auVar498 = vblendmps_avx512vl(auVar497,auVar50);
        bVar28 = (byte)uVar426;
        auVar499._0_4_ =
             (uint)(bVar28 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar28 & 1) * in_ZMM21._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar499._4_4_ = (uint)bVar11 * auVar498._4_4_ | (uint)!bVar11 * in_ZMM21._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar499._8_4_ = (uint)bVar11 * auVar498._8_4_ | (uint)!bVar11 * in_ZMM21._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar499._12_4_ = (uint)bVar11 * auVar498._12_4_ | (uint)!bVar11 * in_ZMM21._12_4_;
        auVar497 = vdivps_avx512vl(auVar499,auVar497);
        auVar500._0_4_ = (uint)(bVar28 & 1) * auVar497._0_4_ | !(bool)(bVar28 & 1) * auVar499._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar500._4_4_ = (uint)bVar11 * auVar497._4_4_ | !bVar11 * auVar499._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar500._8_4_ = (uint)bVar11 * auVar497._8_4_ | !bVar11 * auVar499._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar500._12_4_ = (uint)bVar11 * auVar497._12_4_ | !bVar11 * auVar499._12_4_;
        in_ZMM21 = ZEXT1664(auVar500);
        auVar497 = vmulps_avx512vl(auVar500,auVar500);
        auVar498 = vmulps_avx512vl(auVar497,auVar497);
        uVar427 = vcmpps_avx512vl(auVar504,auVar516,4);
        uVar427 = uVar46 & uVar427;
        auVar501 = vfmadd213ps_avx512vl(auVar1335,auVar498,auVar1391);
        auVar501 = vfmadd213ps_avx512vl(auVar501,auVar498,auVar1445);
        auVar502 = vfmadd213ps_avx512vl(auVar1553,auVar498,auVar1607);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1661);
        auVar502 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1715);
        auVar501 = vfmadd213ps_avx512vl(auVar501,auVar498,auVar1499);
        auVar498 = vfmadd213ps_avx512vl(auVar502,auVar498,auVar1272);
        auVar497 = vfmadd231ps_avx512vl(auVar498,auVar497,auVar501);
        auVar497 = vmulps_avx512vl(auVar497,auVar500);
        uVar428 = vcmpps_avx512vl(auVar504,auVar516,1);
        auVar498 = vaddps_avx512vl(auVar497,auVar1768);
        auVar503._0_4_ =
             (uint)(bVar28 & 1) * auVar498._0_4_ | (uint)!(bool)(bVar28 & 1) * auVar497._0_4_;
        bVar11 = (bool)((byte)(uVar426 >> 1) & 1);
        auVar503._4_4_ = (uint)bVar11 * auVar498._4_4_ | (uint)!bVar11 * auVar497._4_4_;
        bVar11 = (bool)((byte)(uVar426 >> 2) & 1);
        auVar503._8_4_ = (uint)bVar11 * auVar498._8_4_ | (uint)!bVar11 * auVar497._8_4_;
        bVar11 = (bool)((byte)(uVar426 >> 3) & 1);
        auVar503._12_4_ = (uint)bVar11 * auVar498._12_4_ | (uint)!bVar11 * auVar497._12_4_;
        auVar496 = vpternlogd_avx512vl(auVar503,auVar496,auVar1158,0xf8);
        auVar504 = vpternlogd_avx512vl(auVar504,auVar492,auVar1158,0xec);
        auVar497 = vaddps_avx512vl(auVar496,auVar494);
        bVar11 = (bool)((byte)uVar428 & 1);
        bVar14 = (bool)((byte)(uVar428 >> 1) & 1);
        bVar17 = (bool)((byte)(uVar428 >> 2) & 1);
        bVar20 = (bool)((byte)(uVar428 >> 3) & 1);
        uVar45 = vcmpps_avx512vl(auVar516,auVar504,2);
        uVar47 = (ushort)uVar46 | (ushort)uVar45;
        auVar498 = vpblendmd_avx512vl(auVar493,auVar495);
        bVar12 = (bool)((byte)uVar47 & 1);
        bVar15 = (bool)((byte)(uVar47 >> 1) & 1);
        bVar18 = (bool)((byte)(uVar47 >> 2) & 1);
        bVar21 = (bool)((byte)(uVar47 >> 3) & 1);
        bVar13 = (bool)((byte)uVar427 & 1);
        bVar16 = (bool)((byte)(uVar427 >> 1) & 1);
        bVar19 = (bool)((byte)(uVar427 >> 2) & 1);
        bVar22 = (bool)((byte)(uVar427 >> 3) & 1);
        *outptr = (float)((uint)bVar13 *
                          ((uint)bVar11 * auVar497._0_4_ | (uint)!bVar11 * auVar496._0_4_) |
                         (uint)!bVar13 *
                         ((uint)bVar12 * auVar498._0_4_ | (uint)!bVar12 * auVar504._0_4_));
        outptr[1] = (float)((uint)bVar16 *
                            ((uint)bVar14 * auVar497._4_4_ | (uint)!bVar14 * auVar496._4_4_) |
                           (uint)!bVar16 *
                           ((uint)bVar15 * auVar498._4_4_ | (uint)!bVar15 * auVar504._4_4_));
        outptr[2] = (float)((uint)bVar19 *
                            ((uint)bVar17 * auVar497._8_4_ | (uint)!bVar17 * auVar496._8_4_) |
                           (uint)!bVar19 *
                           ((uint)bVar18 * auVar498._8_4_ | (uint)!bVar18 * auVar504._8_4_));
        outptr[3] = (float)((uint)bVar22 *
                            ((uint)bVar20 * auVar497._12_4_ | (uint)!bVar20 * auVar496._12_4_) |
                           (uint)!bVar22 *
                           ((uint)bVar21 * auVar498._12_4_ | (uint)!bVar21 * auVar504._12_4_));
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
        outptr = outptr + 4;
        uVar422 = uVar872 + 4;
        iVar421 = uVar872 + 7;
        uVar872 = uVar422;
      } while (iVar421 < (int)uVar424);
    }
    if (uVar424 - uVar422 != 0 && (int)uVar422 <= (int)uVar424) {
      lVar425 = 0;
      do {
        auVar917._0_4_ = atan2f(auVar559._0_4_,*(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4));
        outptr[lVar425] = auVar917._0_4_;
        lVar425 = lVar425 + 1;
      } while (uVar424 - uVar422 != (int)lVar425);
    }
  default:
    goto switchD_0039e1a5_default;
  }
  uVar422 = bw;
  if (bw < aw) {
    uVar422 = aw;
  }
  iVar421 = bp;
  if (bp < ap) {
    iVar421 = ap;
  }
  uVar424 = iVar421 * uVar422;
  if (ap != bp) {
LAB_003a2362:
    if (bp != 1) {
      return;
    }
    if (aw == bw) {
      uVar424 = uVar422;
      if (0 < (int)uVar422 && iVar421 == 0x10) {
        do {
          auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
          auVar730 = vaddps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar730;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)outptr + 0x40);
          uVar424 = uVar424 - 1;
        } while (uVar424 != 0);
      }
      if (iVar421 == 8) {
        uVar424 = 0;
        if (1 < (int)uVar422) {
          iVar423 = 1;
          do {
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = ptr1[1];
            auVar974._4_4_ = auVar917._0_4_;
            auVar974._0_4_ = auVar917._0_4_;
            auVar974._8_4_ = auVar917._0_4_;
            auVar974._12_4_ = auVar917._0_4_;
            auVar974._16_4_ = auVar917._0_4_;
            auVar974._20_4_ = auVar917._0_4_;
            auVar974._24_4_ = auVar917._0_4_;
            auVar974._28_4_ = auVar917._0_4_;
            auVar730 = vinsertf64x4_avx512f
                                 (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                     CONCAT424(auVar559._0_4_,
                                                               CONCAT420(auVar559._0_4_,
                                                                         CONCAT416(auVar559._0_4_,
                                                                                   CONCAT412(
                                                  auVar559._0_4_,
                                                  CONCAT48(auVar559._0_4_,
                                                           CONCAT44(auVar559._0_4_,auVar559._0_4_)))
                                                  ))))),auVar974,1);
            auVar730 = vaddps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
            *(undefined1 (*) [64])outptr = auVar730;
            ptr = (float *)((long)ptr + 0x40);
            ptr1 = ptr1 + 2;
            outptr = (float *)((long)outptr + 0x40);
            iVar423 = iVar423 + 2;
          } while (iVar423 < (int)uVar422);
          uVar424 = uVar422 & 0x7ffffffe;
        }
        iVar423 = uVar422 - uVar424;
        if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
          do {
            auVar559._0_4_ = *ptr1;
            auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
            auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
            auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
            auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
            auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
            fVar918 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
            fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
            *(float *)*(undefined1 (*) [64])outptr =
                 auVar559._0_4_ + *(float *)*(undefined1 (*) [64])ptr;
            *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ + auVar917._0_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar559._0_4_ + auVar914._0_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar559._0_4_ + auVar916._0_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar559._0_4_ + auVar913._0_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar559._0_4_ + auVar915._0_4_;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar559._0_4_ + fVar918;
            *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar559._0_4_ + fVar397;
            ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
            ptr1 = ptr1 + 1;
            outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
            iVar423 = iVar423 + -1;
          } while (iVar423 != 0);
        }
      }
      if (iVar421 != 4) {
        return;
      }
      uVar424 = 0;
      if (3 < (int)uVar422) {
        iVar421 = 3;
        do {
          auVar559._0_4_ = ptr1[2];
          auVar902._4_4_ = auVar559._0_4_;
          auVar902._0_4_ = auVar559._0_4_;
          auVar902._8_4_ = auVar559._0_4_;
          auVar902._12_4_ = auVar559._0_4_;
          auVar559._0_4_ = ptr1[3];
          auVar902._20_4_ = auVar559._0_4_;
          auVar902._16_4_ = auVar559._0_4_;
          auVar902._24_4_ = auVar559._0_4_;
          auVar902._28_4_ = auVar559._0_4_;
          auVar559._0_4_ = *ptr1;
          auVar917._0_4_ = ptr1[1];
          auVar730 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                              CONCAT48(auVar917._0_4_,
                                                                       CONCAT44(auVar917._0_4_,
                                                                                auVar917._0_4_))),
                                                    CONCAT412(auVar559._0_4_,
                                                              CONCAT48(auVar559._0_4_,
                                                                       CONCAT44(auVar559._0_4_,
                                                                                auVar559._0_4_))))),
                                auVar902,1);
          auVar730 = vaddps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar730;
          ptr = (float *)((long)ptr + 0x40);
          ptr1 = ptr1 + 4;
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 4;
        } while (iVar421 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffc;
      }
      uVar872 = uVar424 | 1;
      while ((int)uVar872 < (int)uVar422) {
        auVar559._0_4_ = *ptr1;
        auVar917._0_4_ = ptr1[1];
        auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
        auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
        auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
        auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
        fVar918 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
        fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
        fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
        *(float *)*(undefined1 (*) [64])outptr =
             auVar559._0_4_ + *(float *)*(undefined1 (*) [64])ptr;
        *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ + auVar914._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar559._0_4_ + auVar916._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar559._0_4_ + auVar913._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar917._0_4_ + auVar915._0_4_;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar917._0_4_ + fVar918;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar917._0_4_ + fVar397;
        *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar917._0_4_ + fVar398;
        ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
        ptr1 = ptr1 + 2;
        outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
        uVar872 = uVar424 + 3;
        uVar424 = uVar424 + 2;
      }
      iVar421 = uVar422 - uVar424;
      if (iVar421 == 0 || (int)uVar422 < (int)uVar424) {
        ::_ps512_1[0] = ::_ps512_1[0];
        ::_ps512_1[1] = ::_ps512_1[1];
        ::_ps512_1[2] = ::_ps512_1[2];
        ::_ps512_1[3] = ::_ps512_1[3];
        ::_ps512_1[4] = ::_ps512_1[4];
        ::_ps512_1[5] = ::_ps512_1[5];
        ::_ps512_1[6] = ::_ps512_1[6];
        ::_ps512_1[7] = ::_ps512_1[7];
        ::_ps512_1[8] = ::_ps512_1[8];
        ::_ps512_1[9] = ::_ps512_1[9];
        ::_ps512_1[10] = ::_ps512_1[10];
        ::_ps512_1[0xb] = ::_ps512_1[0xb];
        ::_ps512_1[0xc] = ::_ps512_1[0xc];
        ::_ps512_1[0xd] = ::_ps512_1[0xd];
        ::_ps512_1[0xe] = ::_ps512_1[0xe];
        ::_ps512_1[0xf] = ::_ps512_1[0xf];
        ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
        ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
        ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
        ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
        ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
        ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
        ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
        ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
        ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
        ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
        ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
        ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
        ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
        ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
        ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
        ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
        ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
        ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
        ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
        ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
        ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
        ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
        ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
        ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
        ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
        ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
        ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
        ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
        ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
        ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
        ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
        ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
        ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
        ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
        ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
        ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
        ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
        ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
        ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
        ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
        ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
        ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
        ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
        ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
        ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
        ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
        ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
        ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
        ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
        ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
        ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
        ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
        ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
        ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
        ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
        ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
        ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
        ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
        ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
        ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
        ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
        ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
        ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
        ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
        ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
        ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
        ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
        ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
        ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
        ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
        ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
        ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
        ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
        ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
        ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
        ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
        ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
        ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
        ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
        ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
        ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
        ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
        ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
        ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
        ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
        ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
        ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
        ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
        ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
        ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
        ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
        ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
        ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
        ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
        ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
        ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
        ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
        ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
        ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
        ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
        ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
        ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
        ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
        ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
        ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
        ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
        ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
        ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
        ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
        ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
        ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
        ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
        ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
        ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
        ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
        ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
        ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
        ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
        ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
        ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
        ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
        ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
        ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
        ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
        ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
        ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
        ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
        ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
        ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
        ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
        ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
        ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
        ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
        ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
        ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
        ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
        ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
        ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
        ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
        ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
        ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
        ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
        ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
        ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
        ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
        ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
        ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
        ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
        ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
        ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
        ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
        ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
        ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
        ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
        ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
        ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
        ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
        ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
        ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
        ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
        _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
        _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
        _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
        _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
        _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
        _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
        _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
        _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
        _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
        _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
        _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
        _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
        _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
        _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
        _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
        _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
        _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
        _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
        _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
        _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
        _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
        _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
        _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
        _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
        _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
        _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
        _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
        _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
        _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
        _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
        _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
        _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
        _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
        _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
        _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
        _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
        _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
        _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
        _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
        _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
        _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
        _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
        _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
        _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
        _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
        _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
        _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
        _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
        _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
        _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
        _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
        _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
        _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
        _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
        _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
        _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
        _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
        _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
        _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
        _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
        _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
        _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
        _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
        _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
        _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
        _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
        _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
        _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
        _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
        _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
        _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
        _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
        _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
        _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
        _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
        _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
        _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
        _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
        _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
        _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
        _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
        _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
        _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
        _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
        _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
        _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
        _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
        _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
        _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
        _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
        _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
        _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
        _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
        _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
        _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
        _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
        _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
        _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
        _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
        _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
        _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
        _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
        _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
        _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
        _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
        _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
        _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
        _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
        _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
        _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
        _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
        _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
        _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
        _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
        _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
        _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
        _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
        _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
        _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
        _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
        _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
        _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
        _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
        _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
        _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
        _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
        _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
        _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
        _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
        _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
        _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
        _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
        _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
        _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
        _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
        _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
        _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
        _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
        _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
        _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
        _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
        _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
        _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
        _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
        _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
        _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
        _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
        _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
        _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
        _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
        _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
        _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
        _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
        _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
        _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
        _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
        _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
        _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
        _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
        _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
        _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
        _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
        _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
        _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
        _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
        _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
        _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
        _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
        _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
        _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
        _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
        _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
        _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
        _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
        _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
        _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
        _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
        _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
        _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
        _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
        _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
        _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
        _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
        _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
        _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
        _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
        _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
        _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
        _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
        _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
        _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
        _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
        _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
        _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
        _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
        _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
        _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
        _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
        _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
        _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
        _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
        _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
        _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
        _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
        _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
        _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
        _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
        _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
        _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
        _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
        _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
        _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
        _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
        _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
        _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
        _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
        _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
        _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
        _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
        _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
        _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
        _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
        _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
        _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
        return;
      }
      lVar425 = 0;
      do {
        auVar559._0_4_ = *(float *)((long)ptr1 + lVar425);
        pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
        auVar917._0_4_ = pfVar9[1];
        auVar914._0_4_ = pfVar9[2];
        auVar916._0_4_ = pfVar9[3];
        pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4);
        *pfVar10 = auVar559._0_4_ + *pfVar9;
        pfVar10[1] = auVar559._0_4_ + auVar917._0_4_;
        pfVar10[2] = auVar559._0_4_ + auVar914._0_4_;
        pfVar10[3] = auVar559._0_4_ + auVar916._0_4_;
        lVar425 = lVar425 + 4;
        iVar421 = iVar421 + -1;
      } while (iVar421 != 0);
      return;
    }
    if (bw == 1) {
      auVar730 = vbroadcastss_avx512f(ZEXT416((uint)*ptr1));
      if ((int)uVar424 < 0x10) {
        uVar422 = 0;
      }
      else {
        iVar421 = 0xf;
        do {
          auVar712 = vaddps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr = (float *)((long)ptr + 0x40);
          outptr = (float *)((long)outptr + 0x40);
          iVar421 = iVar421 + 0x10;
        } while (iVar421 < (int)uVar424);
        uVar422 = uVar424 & 0x7ffffff0;
        auVar730 = ZEXT464((uint)*ptr1);
      }
      auVar559._0_4_ = auVar730._0_4_;
      uVar872 = uVar422;
      if ((int)(uVar422 | 7) < (int)uVar424) {
        do {
          auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
          auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
          auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
          auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
          auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
          fVar918 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
          fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
          *(float *)*(undefined1 (*) [64])outptr =
               auVar559._0_4_ + *(float *)*(undefined1 (*) [64])ptr;
          *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ + auVar917._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar559._0_4_ + auVar914._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar559._0_4_ + auVar916._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar559._0_4_ + auVar913._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar559._0_4_ + auVar915._0_4_;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar559._0_4_ + fVar918;
          *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar559._0_4_ + fVar397;
          ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          uVar422 = uVar872 + 8;
          iVar421 = uVar872 + 0xf;
          uVar872 = uVar422;
        } while (iVar421 < (int)uVar424);
        auVar559._0_4_ = *ptr1;
      }
      if ((int)uVar424 <= (int)(uVar422 | 3)) {
        return;
      }
      lVar425 = 0;
      do {
        pfVar9 = (float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
        auVar917._0_4_ = pfVar9[1];
        auVar914._0_4_ = pfVar9[2];
        auVar916._0_4_ = pfVar9[3];
        pfVar10 = (float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4);
        *pfVar10 = auVar559._0_4_ + *pfVar9;
        pfVar10[1] = auVar559._0_4_ + auVar917._0_4_;
        pfVar10[2] = auVar559._0_4_ + auVar914._0_4_;
        pfVar10[3] = auVar559._0_4_ + auVar916._0_4_;
        lVar425 = lVar425 + 4;
      } while ((int)(uVar422 + 3 + (int)lVar425) < (int)uVar424);
      return;
    }
    if (aw != 1) {
      return;
    }
    if (iVar421 == 0x10) {
      auVar730 = *(undefined1 (*) [64])ptr;
      uVar424 = uVar422;
      do {
        auVar559._0_4_ = *ptr1;
        auVar368._4_4_ = auVar559._0_4_;
        auVar368._0_4_ = auVar559._0_4_;
        auVar368._8_4_ = auVar559._0_4_;
        auVar368._12_4_ = auVar559._0_4_;
        auVar368._16_4_ = auVar559._0_4_;
        auVar368._20_4_ = auVar559._0_4_;
        auVar368._24_4_ = auVar559._0_4_;
        auVar368._28_4_ = auVar559._0_4_;
        auVar368._32_4_ = auVar559._0_4_;
        auVar368._36_4_ = auVar559._0_4_;
        auVar368._40_4_ = auVar559._0_4_;
        auVar368._44_4_ = auVar559._0_4_;
        auVar368._48_4_ = auVar559._0_4_;
        auVar368._52_4_ = auVar559._0_4_;
        auVar368._56_4_ = auVar559._0_4_;
        auVar368._60_4_ = auVar559._0_4_;
        auVar712 = vaddps_avx512f(auVar730,auVar368);
        *(undefined1 (*) [64])outptr = auVar712;
        ptr1 = ptr1 + 1;
        outptr = (float *)((long)outptr + 0x40);
        uVar424 = uVar424 - 1;
      } while (uVar424 != 0);
    }
    if (iVar421 == 8) {
      auVar730 = vbroadcastf64x4_avx512f(*(undefined1 (*) [32])ptr);
      uVar424 = 0;
      if (1 < (int)uVar422) {
        iVar423 = 1;
        do {
          auVar559._0_4_ = *ptr1;
          auVar917._0_4_ = ptr1[1];
          auVar1059._4_4_ = auVar917._0_4_;
          auVar1059._0_4_ = auVar917._0_4_;
          auVar1059._8_4_ = auVar917._0_4_;
          auVar1059._12_4_ = auVar917._0_4_;
          auVar1059._16_4_ = auVar917._0_4_;
          auVar1059._20_4_ = auVar917._0_4_;
          auVar1059._24_4_ = auVar917._0_4_;
          auVar1059._28_4_ = auVar917._0_4_;
          auVar712 = vinsertf64x4_avx512f
                               (ZEXT3264(CONCAT428(auVar559._0_4_,
                                                   CONCAT424(auVar559._0_4_,
                                                             CONCAT420(auVar559._0_4_,
                                                                       CONCAT416(auVar559._0_4_,
                                                                                 CONCAT412(auVar559.
                                                  _0_4_,CONCAT48(auVar559._0_4_,
                                                                 CONCAT44(auVar559._0_4_,
                                                                          auVar559._0_4_)))))))),
                                auVar1059,1);
          auVar712 = vaddps_avx512f(auVar712,auVar730);
          *(undefined1 (*) [64])outptr = auVar712;
          ptr1 = ptr1 + 2;
          outptr = (float *)((long)outptr + 0x40);
          iVar423 = iVar423 + 2;
        } while (iVar423 < (int)uVar422);
        uVar424 = uVar422 & 0x7ffffffe;
      }
      iVar423 = uVar422 - uVar424;
      if (iVar423 != 0 && (int)uVar424 <= (int)uVar422) {
        do {
          auVar559._0_4_ = *ptr1;
          auVar323._4_4_ = auVar559._0_4_;
          auVar323._0_4_ = auVar559._0_4_;
          auVar323._8_4_ = auVar559._0_4_;
          auVar323._12_4_ = auVar559._0_4_;
          auVar323._16_4_ = auVar559._0_4_;
          auVar323._20_4_ = auVar559._0_4_;
          auVar323._24_4_ = auVar559._0_4_;
          auVar323._28_4_ = auVar559._0_4_;
          auVar671 = vaddps_avx512vl(auVar730._0_32_,auVar323);
          *(undefined1 (*) [32])*(undefined1 (*) [64])outptr = auVar671;
          ptr1 = ptr1 + 1;
          outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
          iVar423 = iVar423 + -1;
        } while (iVar423 != 0);
      }
    }
    if (iVar421 != 4) {
      return;
    }
    auVar730 = vbroadcastf32x4_avx512f(*(undefined1 (*) [16])ptr);
    uVar424 = 0;
    if (3 < (int)uVar422) {
      iVar421 = 3;
      do {
        auVar559._0_4_ = ptr1[2];
        auVar993._4_4_ = auVar559._0_4_;
        auVar993._0_4_ = auVar559._0_4_;
        auVar993._8_4_ = auVar559._0_4_;
        auVar993._12_4_ = auVar559._0_4_;
        auVar559._0_4_ = ptr1[3];
        auVar993._20_4_ = auVar559._0_4_;
        auVar993._16_4_ = auVar559._0_4_;
        auVar993._24_4_ = auVar559._0_4_;
        auVar993._28_4_ = auVar559._0_4_;
        auVar559._0_4_ = *ptr1;
        auVar917._0_4_ = ptr1[1];
        auVar712 = vinsertf64x4_avx512f
                             (ZEXT3264(CONCAT1616(CONCAT412(auVar917._0_4_,
                                                            CONCAT48(auVar917._0_4_,
                                                                     CONCAT44(auVar917._0_4_,
                                                                              auVar917._0_4_))),
                                                  CONCAT412(auVar559._0_4_,
                                                            CONCAT48(auVar559._0_4_,
                                                                     CONCAT44(auVar559._0_4_,
                                                                              auVar559._0_4_))))),
                              auVar993,1);
        auVar712 = vaddps_avx512f(auVar712,auVar730);
        *(undefined1 (*) [64])outptr = auVar712;
        ptr1 = ptr1 + 4;
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 4;
      } while (iVar421 < (int)uVar422);
      uVar424 = uVar422 & 0x7ffffffc;
    }
    uVar872 = uVar424 | 1;
    while ((int)uVar872 < (int)uVar422) {
      auVar559._0_4_ = *ptr1;
      auVar917._0_4_ = ptr1[1];
      *(float *)*(undefined1 (*) [64])outptr = auVar559._0_4_ + auVar730._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ + auVar730._4_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar559._0_4_ + auVar730._8_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar559._0_4_ + auVar730._12_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar917._0_4_ + auVar730._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar917._0_4_ + auVar730._4_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar917._0_4_ + auVar730._8_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar917._0_4_ + auVar730._12_4_;
      ptr1 = ptr1 + 2;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      uVar872 = uVar424 + 3;
      uVar424 = uVar424 + 2;
    }
    if ((int)uVar422 <= (int)uVar424) {
      ::_ps512_1[0] = ::_ps512_1[0];
      ::_ps512_1[1] = ::_ps512_1[1];
      ::_ps512_1[2] = ::_ps512_1[2];
      ::_ps512_1[3] = ::_ps512_1[3];
      ::_ps512_1[4] = ::_ps512_1[4];
      ::_ps512_1[5] = ::_ps512_1[5];
      ::_ps512_1[6] = ::_ps512_1[6];
      ::_ps512_1[7] = ::_ps512_1[7];
      ::_ps512_1[8] = ::_ps512_1[8];
      ::_ps512_1[9] = ::_ps512_1[9];
      ::_ps512_1[10] = ::_ps512_1[10];
      ::_ps512_1[0xb] = ::_ps512_1[0xb];
      ::_ps512_1[0xc] = ::_ps512_1[0xc];
      ::_ps512_1[0xd] = ::_ps512_1[0xd];
      ::_ps512_1[0xe] = ::_ps512_1[0xe];
      ::_ps512_1[0xf] = ::_ps512_1[0xf];
      ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
      ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
      ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
      ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
      ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
      ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
      ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
      ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
      ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
      ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
      ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
      ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
      ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
      ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
      ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
      ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
      ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
      ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
      ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
      ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
      ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
      ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
      ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
      ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
      ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
      ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
      ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
      ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
      ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
      ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
      ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
      ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
      ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
      ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
      ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
      ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
      ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
      ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
      ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
      ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
      ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
      ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
      ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
      ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
      ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
      ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
      ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
      ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
      ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
      ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
      ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
      ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
      ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
      ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
      ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
      ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
      ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
      ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
      ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
      ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
      ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
      ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
      ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
      ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
      ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
      ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
      ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
      ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
      ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
      ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
      ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
      ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
      ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
      ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
      ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
      ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
      ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
      ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
      ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
      ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
      ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
      ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
      ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
      ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
      ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
      ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
      ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
      ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
      ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
      ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
      ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
      ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
      ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
      ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
      ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
      ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
      ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
      ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
      ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
      ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
      ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
      ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
      ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
      ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
      ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
      ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
      ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
      ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
      ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
      ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
      ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
      ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
      ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
      ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
      ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
      ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
      ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
      ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
      ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
      ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
      ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
      ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
      ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
      ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
      ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
      ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
      ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
      ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
      ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
      ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
      ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
      ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
      ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
      ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
      ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
      ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
      ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
      ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
      ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
      ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
      ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
      ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
      ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
      ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
      ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
      ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
      ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
      ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
      ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
      ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
      ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
      ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
      ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
      ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
      ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
      ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
      ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
      ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
      ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
      ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
      _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
      _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
      _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
      _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
      _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
      _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
      _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
      _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
      _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
      _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
      _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
      _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
      _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
      _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
      _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
      _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
      _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
      _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
      _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
      _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
      _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
      _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
      _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
      _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
      _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
      _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
      _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
      _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
      _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
      _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
      _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
      _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
      _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
      _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
      _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
      _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
      _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
      _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
      _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
      _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
      _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
      _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
      _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
      _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
      _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
      _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
      _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
      _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
      _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
      _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
      _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
      _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
      _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
      _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
      _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
      _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
      _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
      _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
      _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
      _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
      _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
      _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
      _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
      _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
      _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
      _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
      _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
      _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
      _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
      _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
      _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
      _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
      _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
      _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
      _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
      _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
      _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
      _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
      _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
      _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
      _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
      _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
      _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
      _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
      _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
      _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
      _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
      _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
      _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
      _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
      _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
      _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
      _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
      _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
      _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
      _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
      _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
      _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
      _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
      _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
      _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
      _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
      _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
      _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
      _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
      _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
      _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
      _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
      _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
      _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
      _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
      _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
      _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
      _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
      _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
      _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
      _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
      _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
      _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
      _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
      _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
      _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
      _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
      _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
      _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
      _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
      _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
      _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
      _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
      _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
      _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
      _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
      _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
      _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
      _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
      _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
      _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
      _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
      _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
      _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
      _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
      _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
      _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
      _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
      _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
      _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
      _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
      _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
      _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
      _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
      _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
      _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
      _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
      _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
      _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
      _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
      _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
      _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
      _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
      _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
      _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
      _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
      _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
      _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
      _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
      _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
      _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
      _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
      _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
      _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
      _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
      _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
      _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
      _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
      _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
      _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
      _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
      _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
      _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
      _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
      _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
      _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
      _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
      _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
      _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
      _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
      _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
      _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
      _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
      _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
      _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
      _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
      _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
      _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
      _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
      _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
      _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
      _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
      _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
      _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
      _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
      _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
      _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
      _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
      _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
      _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
      _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
      _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
      _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
      _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
      _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
      _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
      _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
      _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
      _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
      _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
      _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
      _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
      _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
      _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
      _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
      _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
      _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
      _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
      return;
    }
    lVar425 = 0;
    do {
      auVar559._0_4_ = ptr1[lVar425];
      auVar166._4_4_ = auVar559._0_4_;
      auVar166._0_4_ = auVar559._0_4_;
      auVar166._8_4_ = auVar559._0_4_;
      auVar166._12_4_ = auVar559._0_4_;
      auVar462 = vaddps_avx512vl(auVar730._0_16_,auVar166);
      *(undefined1 (*) [16])*(undefined1 (*) [64])outptr = auVar462;
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      lVar425 = lVar425 + 1;
    } while (uVar422 - uVar424 != (int)lVar425);
    return;
  }
  if (aw == bw) {
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      iVar421 = 0xf;
      do {
        auVar730 = vaddps_avx512f(*(undefined1 (*) [64])ptr1,*(undefined1 (*) [64])ptr);
        *(undefined1 (*) [64])outptr = auVar730;
        ptr = (float *)((long)ptr + 0x40);
        ptr1 = (float *)((long)ptr1 + 0x40);
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
    }
    uVar872 = uVar422 | 7;
    while ((int)uVar872 < (int)uVar424) {
      auVar559._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
      auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
      auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
      auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
      auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
      auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
      fVar918 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x1c);
      fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 4);
      fVar398 = *(float *)(*(undefined1 (*) [64])ptr + 8);
      fVar399 = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
      fVar400 = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
      fVar401 = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
      fVar402 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
      fVar403 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
      *(float *)*(undefined1 (*) [64])outptr =
           *(float *)*(undefined1 (*) [64])ptr1 + *(float *)*(undefined1 (*) [64])ptr;
      *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ + fVar397;
      *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar917._0_4_ + fVar398;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar914._0_4_ + fVar399;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar916._0_4_ + fVar400;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar913._0_4_ + fVar401;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar915._0_4_ + fVar402;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = fVar918 + fVar403;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
      ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      uVar872 = uVar422 + 0xf;
      uVar422 = uVar422 + 8;
    }
    uVar872 = uVar422 | 3;
    while ((int)uVar872 < (int)uVar424) {
      auVar559._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
      auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
      auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
      auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
      auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
      auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
      *(float *)*(undefined1 (*) [64])outptr =
           *(float *)*(undefined1 (*) [64])ptr1 + *(float *)*(undefined1 (*) [64])ptr;
      *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar559._0_4_ + auVar916._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar917._0_4_ + auVar913._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar914._0_4_ + auVar915._0_4_;
      ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
      ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      uVar872 = uVar422 + 7;
      uVar422 = uVar422 + 4;
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      ::_ps512_1[0] = ::_ps512_1[0];
      ::_ps512_1[1] = ::_ps512_1[1];
      ::_ps512_1[2] = ::_ps512_1[2];
      ::_ps512_1[3] = ::_ps512_1[3];
      ::_ps512_1[4] = ::_ps512_1[4];
      ::_ps512_1[5] = ::_ps512_1[5];
      ::_ps512_1[6] = ::_ps512_1[6];
      ::_ps512_1[7] = ::_ps512_1[7];
      ::_ps512_1[8] = ::_ps512_1[8];
      ::_ps512_1[9] = ::_ps512_1[9];
      ::_ps512_1[10] = ::_ps512_1[10];
      ::_ps512_1[0xb] = ::_ps512_1[0xb];
      ::_ps512_1[0xc] = ::_ps512_1[0xc];
      ::_ps512_1[0xd] = ::_ps512_1[0xd];
      ::_ps512_1[0xe] = ::_ps512_1[0xe];
      ::_ps512_1[0xf] = ::_ps512_1[0xf];
      ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
      ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
      ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
      ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
      ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
      ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
      ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
      ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
      ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
      ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
      ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
      ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
      ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
      ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
      ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
      ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
      ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
      ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
      ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
      ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
      ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
      ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
      ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
      ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
      ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
      ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
      ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
      ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
      ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
      ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
      ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
      ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
      ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
      ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
      ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
      ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
      ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
      ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
      ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
      ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
      ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
      ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
      ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
      ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
      ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
      ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
      ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
      ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
      ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
      ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
      ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
      ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
      ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
      ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
      ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
      ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
      ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
      ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
      ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
      ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
      ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
      ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
      ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
      ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
      ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
      ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
      ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
      ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
      ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
      ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
      ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
      ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
      ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
      ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
      ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
      ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
      ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
      ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
      ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
      ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
      ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
      ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
      ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
      ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
      ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
      ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
      ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
      ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
      ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
      ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
      ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
      ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
      ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
      ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
      ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
      ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
      ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
      ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
      ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
      ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
      ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
      ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
      ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
      ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
      ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
      ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
      ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
      ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
      ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
      ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
      ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
      ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
      ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
      ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
      ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
      ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
      ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
      ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
      ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
      ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
      ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
      ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
      ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
      ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
      ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
      ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
      ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
      ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
      ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
      ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
      ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
      ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
      ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
      ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
      ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
      ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
      ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
      ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
      ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
      ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
      ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
      ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
      ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
      ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
      ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
      ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
      ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
      ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
      ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
      ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
      ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
      ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
      ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
      ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
      ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
      ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
      ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
      ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
      ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
      ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
      _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
      _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
      _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
      _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
      _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
      _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
      _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
      _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
      _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
      _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
      _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
      _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
      _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
      _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
      _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
      _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
      _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
      _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
      _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
      _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
      _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
      _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
      _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
      _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
      _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
      _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
      _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
      _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
      _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
      _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
      _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
      _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
      _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
      _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
      _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
      _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
      _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
      _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
      _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
      _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
      _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
      _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
      _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
      _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
      _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
      _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
      _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
      _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
      _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
      _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
      _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
      _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
      _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
      _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
      _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
      _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
      _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
      _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
      _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
      _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
      _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
      _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
      _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
      _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
      _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
      _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
      _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
      _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
      _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
      _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
      _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
      _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
      _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
      _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
      _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
      _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
      _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
      _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
      _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
      _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
      _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
      _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
      _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
      _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
      _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
      _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
      _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
      _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
      _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
      _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
      _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
      _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
      _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
      _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
      _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
      _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
      _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
      _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
      _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
      _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
      _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
      _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
      _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
      _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
      _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
      _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
      _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
      _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
      _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
      _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
      _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
      _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
      _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
      _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
      _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
      _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
      _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
      _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
      _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
      _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
      _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
      _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
      _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
      _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
      _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
      _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
      _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
      _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
      _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
      _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
      _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
      _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
      _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
      _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
      _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
      _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
      _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
      _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
      _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
      _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
      _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
      _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
      _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
      _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
      _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
      _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
      _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
      _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
      _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
      _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
      _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
      _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
      _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
      _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
      _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
      _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
      _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
      _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
      _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
      _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
      _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
      _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
      _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
      _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
      _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
      _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
      _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
      _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
      _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
      _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
      _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
      _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
      _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
      _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
      _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
      _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
      _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
      _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
      _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
      _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
      _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
      _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
      _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
      _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
      _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
      _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
      _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
      _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
      _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
      _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
      _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
      _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
      _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
      _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
      _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
      _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
      _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
      _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
      _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
      _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
      _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
      _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
      _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
      _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
      _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
      _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
      _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
      _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
      _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
      _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
      _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
      _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
      _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
      _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
      _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
      _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
      _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
      _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
      _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
      _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
      _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
      _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
      _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
      _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
      return;
    }
    lVar425 = 0;
    do {
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
           *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4) +
           *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  }
  if (bw != 1) {
    if (aw != 1) goto LAB_003a2362;
    auVar559._0_4_ = *ptr;
    if (iVar421 == 4) {
      auVar944 = *(undefined1 (*) [16])ptr;
      auVar730 = ZEXT3264(CONCAT1616(auVar944,auVar944));
    }
    else {
      auVar944._4_4_ = auVar559._0_4_;
      auVar944._0_4_ = auVar559._0_4_;
      auVar944._8_4_ = auVar559._0_4_;
      auVar944._12_4_ = auVar559._0_4_;
      if (iVar421 == 8) {
        auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr);
      }
      else {
        auVar1080._4_4_ = auVar559._0_4_;
        auVar1080._0_4_ = auVar559._0_4_;
        auVar1080._8_4_ = auVar559._0_4_;
        auVar1080._12_4_ = auVar559._0_4_;
        auVar1080._16_4_ = auVar559._0_4_;
        auVar1080._20_4_ = auVar559._0_4_;
        auVar1080._24_4_ = auVar559._0_4_;
        auVar1080._28_4_ = auVar559._0_4_;
        auVar730 = ZEXT3264(auVar1080);
        if (iVar421 == 0x10) {
          auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr);
          goto LAB_003ac927;
        }
      }
    }
    auVar1080 = auVar730._0_32_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar1080,1);
LAB_003ac927:
    uVar422 = 0;
    if (0xf < (int)uVar424) {
      iVar421 = 0xf;
      do {
        auVar712 = vaddps_avx512f(auVar730,*(undefined1 (*) [64])ptr1);
        *(undefined1 (*) [64])outptr = auVar712;
        ptr1 = (float *)((long)ptr1 + 0x40);
        outptr = (float *)((long)outptr + 0x40);
        iVar421 = iVar421 + 0x10;
      } while (iVar421 < (int)uVar424);
      uVar422 = uVar424 & 0x7ffffff0;
    }
    uVar872 = uVar422 | 7;
    while ((int)uVar872 < (int)uVar424) {
      auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
      auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
      auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
      auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0x10);
      auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0x14);
      fVar918 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x18);
      fVar397 = *(float *)(*(undefined1 (*) [64])ptr1 + 0x1c);
      *(float *)*(undefined1 (*) [64])outptr =
           auVar1080._0_4_ + *(float *)*(undefined1 (*) [64])ptr1;
      *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar1080._4_4_ + auVar917._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar1080._8_4_ + auVar914._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar1080._12_4_ + auVar916._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar1080._16_4_ + auVar913._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar1080._20_4_ + auVar915._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar1080._24_4_ + fVar918;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar1080._28_4_ + fVar397;
      ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x20);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
      uVar872 = uVar422 + 0xf;
      uVar422 = uVar422 + 8;
    }
    uVar872 = uVar422 | 3;
    while ((int)uVar872 < (int)uVar424) {
      auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 4);
      auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 8);
      auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr1 + 0xc);
      *(float *)*(undefined1 (*) [64])outptr = auVar944._0_4_ + *(float *)*(undefined1 (*) [64])ptr1
      ;
      *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar944._4_4_ + auVar917._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar944._8_4_ + auVar914._0_4_;
      *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar944._12_4_ + auVar916._0_4_;
      ptr1 = (float *)(*(undefined1 (*) [64])ptr1 + 0x10);
      outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
      uVar872 = uVar422 + 7;
      uVar422 = uVar422 + 4;
    }
    if (uVar424 - uVar422 == 0 || (int)uVar424 < (int)uVar422) {
      ::_ps512_1[0] = ::_ps512_1[0];
      ::_ps512_1[1] = ::_ps512_1[1];
      ::_ps512_1[2] = ::_ps512_1[2];
      ::_ps512_1[3] = ::_ps512_1[3];
      ::_ps512_1[4] = ::_ps512_1[4];
      ::_ps512_1[5] = ::_ps512_1[5];
      ::_ps512_1[6] = ::_ps512_1[6];
      ::_ps512_1[7] = ::_ps512_1[7];
      ::_ps512_1[8] = ::_ps512_1[8];
      ::_ps512_1[9] = ::_ps512_1[9];
      ::_ps512_1[10] = ::_ps512_1[10];
      ::_ps512_1[0xb] = ::_ps512_1[0xb];
      ::_ps512_1[0xc] = ::_ps512_1[0xc];
      ::_ps512_1[0xd] = ::_ps512_1[0xd];
      ::_ps512_1[0xe] = ::_ps512_1[0xe];
      ::_ps512_1[0xf] = ::_ps512_1[0xf];
      ::_ps512_exp_hi[0] = ::_ps512_exp_hi[0];
      ::_ps512_exp_hi[1] = ::_ps512_exp_hi[1];
      ::_ps512_exp_hi[2] = ::_ps512_exp_hi[2];
      ::_ps512_exp_hi[3] = ::_ps512_exp_hi[3];
      ::_ps512_exp_hi[4] = ::_ps512_exp_hi[4];
      ::_ps512_exp_hi[5] = ::_ps512_exp_hi[5];
      ::_ps512_exp_hi[6] = ::_ps512_exp_hi[6];
      ::_ps512_exp_hi[7] = ::_ps512_exp_hi[7];
      ::_ps512_exp_hi[8] = ::_ps512_exp_hi[8];
      ::_ps512_exp_hi[9] = ::_ps512_exp_hi[9];
      ::_ps512_exp_hi[10] = ::_ps512_exp_hi[10];
      ::_ps512_exp_hi[0xb] = ::_ps512_exp_hi[0xb];
      ::_ps512_exp_hi[0xc] = ::_ps512_exp_hi[0xc];
      ::_ps512_exp_hi[0xd] = ::_ps512_exp_hi[0xd];
      ::_ps512_exp_hi[0xe] = ::_ps512_exp_hi[0xe];
      ::_ps512_exp_hi[0xf] = ::_ps512_exp_hi[0xf];
      ::_ps512_exp_lo[0] = ::_ps512_exp_lo[0];
      ::_ps512_exp_lo[1] = ::_ps512_exp_lo[1];
      ::_ps512_exp_lo[2] = ::_ps512_exp_lo[2];
      ::_ps512_exp_lo[3] = ::_ps512_exp_lo[3];
      ::_ps512_exp_lo[4] = ::_ps512_exp_lo[4];
      ::_ps512_exp_lo[5] = ::_ps512_exp_lo[5];
      ::_ps512_exp_lo[6] = ::_ps512_exp_lo[6];
      ::_ps512_exp_lo[7] = ::_ps512_exp_lo[7];
      ::_ps512_exp_lo[8] = ::_ps512_exp_lo[8];
      ::_ps512_exp_lo[9] = ::_ps512_exp_lo[9];
      ::_ps512_exp_lo[10] = ::_ps512_exp_lo[10];
      ::_ps512_exp_lo[0xb] = ::_ps512_exp_lo[0xb];
      ::_ps512_exp_lo[0xc] = ::_ps512_exp_lo[0xc];
      ::_ps512_exp_lo[0xd] = ::_ps512_exp_lo[0xd];
      ::_ps512_exp_lo[0xe] = ::_ps512_exp_lo[0xe];
      ::_ps512_exp_lo[0xf] = ::_ps512_exp_lo[0xf];
      ::_ps512_cephes_LOG2EF[0] = ::_ps512_cephes_LOG2EF[0];
      ::_ps512_cephes_LOG2EF[1] = ::_ps512_cephes_LOG2EF[1];
      ::_ps512_cephes_LOG2EF[2] = ::_ps512_cephes_LOG2EF[2];
      ::_ps512_cephes_LOG2EF[3] = ::_ps512_cephes_LOG2EF[3];
      ::_ps512_cephes_LOG2EF[4] = ::_ps512_cephes_LOG2EF[4];
      ::_ps512_cephes_LOG2EF[5] = ::_ps512_cephes_LOG2EF[5];
      ::_ps512_cephes_LOG2EF[6] = ::_ps512_cephes_LOG2EF[6];
      ::_ps512_cephes_LOG2EF[7] = ::_ps512_cephes_LOG2EF[7];
      ::_ps512_cephes_LOG2EF[8] = ::_ps512_cephes_LOG2EF[8];
      ::_ps512_cephes_LOG2EF[9] = ::_ps512_cephes_LOG2EF[9];
      ::_ps512_cephes_LOG2EF[10] = ::_ps512_cephes_LOG2EF[10];
      ::_ps512_cephes_LOG2EF[0xb] = ::_ps512_cephes_LOG2EF[0xb];
      ::_ps512_cephes_LOG2EF[0xc] = ::_ps512_cephes_LOG2EF[0xc];
      ::_ps512_cephes_LOG2EF[0xd] = ::_ps512_cephes_LOG2EF[0xd];
      ::_ps512_cephes_LOG2EF[0xe] = ::_ps512_cephes_LOG2EF[0xe];
      ::_ps512_cephes_LOG2EF[0xf] = ::_ps512_cephes_LOG2EF[0xf];
      ::_ps512_cephes_exp_p0[0] = ::_ps512_cephes_exp_p0[0];
      ::_ps512_cephes_exp_p0[1] = ::_ps512_cephes_exp_p0[1];
      ::_ps512_cephes_exp_p0[2] = ::_ps512_cephes_exp_p0[2];
      ::_ps512_cephes_exp_p0[3] = ::_ps512_cephes_exp_p0[3];
      ::_ps512_cephes_exp_p0[4] = ::_ps512_cephes_exp_p0[4];
      ::_ps512_cephes_exp_p0[5] = ::_ps512_cephes_exp_p0[5];
      ::_ps512_cephes_exp_p0[6] = ::_ps512_cephes_exp_p0[6];
      ::_ps512_cephes_exp_p0[7] = ::_ps512_cephes_exp_p0[7];
      ::_ps512_cephes_exp_p0[8] = ::_ps512_cephes_exp_p0[8];
      ::_ps512_cephes_exp_p0[9] = ::_ps512_cephes_exp_p0[9];
      ::_ps512_cephes_exp_p0[10] = ::_ps512_cephes_exp_p0[10];
      ::_ps512_cephes_exp_p0[0xb] = ::_ps512_cephes_exp_p0[0xb];
      ::_ps512_cephes_exp_p0[0xc] = ::_ps512_cephes_exp_p0[0xc];
      ::_ps512_cephes_exp_p0[0xd] = ::_ps512_cephes_exp_p0[0xd];
      ::_ps512_cephes_exp_p0[0xe] = ::_ps512_cephes_exp_p0[0xe];
      ::_ps512_cephes_exp_p0[0xf] = ::_ps512_cephes_exp_p0[0xf];
      ::_ps512_cephes_exp_p1[0] = ::_ps512_cephes_exp_p1[0];
      ::_ps512_cephes_exp_p1[1] = ::_ps512_cephes_exp_p1[1];
      ::_ps512_cephes_exp_p1[2] = ::_ps512_cephes_exp_p1[2];
      ::_ps512_cephes_exp_p1[3] = ::_ps512_cephes_exp_p1[3];
      ::_ps512_cephes_exp_p1[4] = ::_ps512_cephes_exp_p1[4];
      ::_ps512_cephes_exp_p1[5] = ::_ps512_cephes_exp_p1[5];
      ::_ps512_cephes_exp_p1[6] = ::_ps512_cephes_exp_p1[6];
      ::_ps512_cephes_exp_p1[7] = ::_ps512_cephes_exp_p1[7];
      ::_ps512_cephes_exp_p1[8] = ::_ps512_cephes_exp_p1[8];
      ::_ps512_cephes_exp_p1[9] = ::_ps512_cephes_exp_p1[9];
      ::_ps512_cephes_exp_p1[10] = ::_ps512_cephes_exp_p1[10];
      ::_ps512_cephes_exp_p1[0xb] = ::_ps512_cephes_exp_p1[0xb];
      ::_ps512_cephes_exp_p1[0xc] = ::_ps512_cephes_exp_p1[0xc];
      ::_ps512_cephes_exp_p1[0xd] = ::_ps512_cephes_exp_p1[0xd];
      ::_ps512_cephes_exp_p1[0xe] = ::_ps512_cephes_exp_p1[0xe];
      ::_ps512_cephes_exp_p1[0xf] = ::_ps512_cephes_exp_p1[0xf];
      ::_ps512_cephes_exp_p2[0] = ::_ps512_cephes_exp_p2[0];
      ::_ps512_cephes_exp_p2[1] = ::_ps512_cephes_exp_p2[1];
      ::_ps512_cephes_exp_p2[2] = ::_ps512_cephes_exp_p2[2];
      ::_ps512_cephes_exp_p2[3] = ::_ps512_cephes_exp_p2[3];
      ::_ps512_cephes_exp_p2[4] = ::_ps512_cephes_exp_p2[4];
      ::_ps512_cephes_exp_p2[5] = ::_ps512_cephes_exp_p2[5];
      ::_ps512_cephes_exp_p2[6] = ::_ps512_cephes_exp_p2[6];
      ::_ps512_cephes_exp_p2[7] = ::_ps512_cephes_exp_p2[7];
      ::_ps512_cephes_exp_p2[8] = ::_ps512_cephes_exp_p2[8];
      ::_ps512_cephes_exp_p2[9] = ::_ps512_cephes_exp_p2[9];
      ::_ps512_cephes_exp_p2[10] = ::_ps512_cephes_exp_p2[10];
      ::_ps512_cephes_exp_p2[0xb] = ::_ps512_cephes_exp_p2[0xb];
      ::_ps512_cephes_exp_p2[0xc] = ::_ps512_cephes_exp_p2[0xc];
      ::_ps512_cephes_exp_p2[0xd] = ::_ps512_cephes_exp_p2[0xd];
      ::_ps512_cephes_exp_p2[0xe] = ::_ps512_cephes_exp_p2[0xe];
      ::_ps512_cephes_exp_p2[0xf] = ::_ps512_cephes_exp_p2[0xf];
      ::_ps512_cephes_exp_p3[0] = ::_ps512_cephes_exp_p3[0];
      ::_ps512_cephes_exp_p3[1] = ::_ps512_cephes_exp_p3[1];
      ::_ps512_cephes_exp_p3[2] = ::_ps512_cephes_exp_p3[2];
      ::_ps512_cephes_exp_p3[3] = ::_ps512_cephes_exp_p3[3];
      ::_ps512_cephes_exp_p3[4] = ::_ps512_cephes_exp_p3[4];
      ::_ps512_cephes_exp_p3[5] = ::_ps512_cephes_exp_p3[5];
      ::_ps512_cephes_exp_p3[6] = ::_ps512_cephes_exp_p3[6];
      ::_ps512_cephes_exp_p3[7] = ::_ps512_cephes_exp_p3[7];
      ::_ps512_cephes_exp_p3[8] = ::_ps512_cephes_exp_p3[8];
      ::_ps512_cephes_exp_p3[9] = ::_ps512_cephes_exp_p3[9];
      ::_ps512_cephes_exp_p3[10] = ::_ps512_cephes_exp_p3[10];
      ::_ps512_cephes_exp_p3[0xb] = ::_ps512_cephes_exp_p3[0xb];
      ::_ps512_cephes_exp_p3[0xc] = ::_ps512_cephes_exp_p3[0xc];
      ::_ps512_cephes_exp_p3[0xd] = ::_ps512_cephes_exp_p3[0xd];
      ::_ps512_cephes_exp_p3[0xe] = ::_ps512_cephes_exp_p3[0xe];
      ::_ps512_cephes_exp_p3[0xf] = ::_ps512_cephes_exp_p3[0xf];
      ::_ps512_cephes_exp_p4[0] = ::_ps512_cephes_exp_p4[0];
      ::_ps512_cephes_exp_p4[1] = ::_ps512_cephes_exp_p4[1];
      ::_ps512_cephes_exp_p4[2] = ::_ps512_cephes_exp_p4[2];
      ::_ps512_cephes_exp_p4[3] = ::_ps512_cephes_exp_p4[3];
      ::_ps512_cephes_exp_p4[4] = ::_ps512_cephes_exp_p4[4];
      ::_ps512_cephes_exp_p4[5] = ::_ps512_cephes_exp_p4[5];
      ::_ps512_cephes_exp_p4[6] = ::_ps512_cephes_exp_p4[6];
      ::_ps512_cephes_exp_p4[7] = ::_ps512_cephes_exp_p4[7];
      ::_ps512_cephes_exp_p4[8] = ::_ps512_cephes_exp_p4[8];
      ::_ps512_cephes_exp_p4[9] = ::_ps512_cephes_exp_p4[9];
      ::_ps512_cephes_exp_p4[10] = ::_ps512_cephes_exp_p4[10];
      ::_ps512_cephes_exp_p4[0xb] = ::_ps512_cephes_exp_p4[0xb];
      ::_ps512_cephes_exp_p4[0xc] = ::_ps512_cephes_exp_p4[0xc];
      ::_ps512_cephes_exp_p4[0xd] = ::_ps512_cephes_exp_p4[0xd];
      ::_ps512_cephes_exp_p4[0xe] = ::_ps512_cephes_exp_p4[0xe];
      ::_ps512_cephes_exp_p4[0xf] = ::_ps512_cephes_exp_p4[0xf];
      ::_ps512_cephes_exp_p5[0] = ::_ps512_cephes_exp_p5[0];
      ::_ps512_cephes_exp_p5[1] = ::_ps512_cephes_exp_p5[1];
      ::_ps512_cephes_exp_p5[2] = ::_ps512_cephes_exp_p5[2];
      ::_ps512_cephes_exp_p5[3] = ::_ps512_cephes_exp_p5[3];
      ::_ps512_cephes_exp_p5[4] = ::_ps512_cephes_exp_p5[4];
      ::_ps512_cephes_exp_p5[5] = ::_ps512_cephes_exp_p5[5];
      ::_ps512_cephes_exp_p5[6] = ::_ps512_cephes_exp_p5[6];
      ::_ps512_cephes_exp_p5[7] = ::_ps512_cephes_exp_p5[7];
      ::_ps512_cephes_exp_p5[8] = ::_ps512_cephes_exp_p5[8];
      ::_ps512_cephes_exp_p5[9] = ::_ps512_cephes_exp_p5[9];
      ::_ps512_cephes_exp_p5[10] = ::_ps512_cephes_exp_p5[10];
      ::_ps512_cephes_exp_p5[0xb] = ::_ps512_cephes_exp_p5[0xb];
      ::_ps512_cephes_exp_p5[0xc] = ::_ps512_cephes_exp_p5[0xc];
      ::_ps512_cephes_exp_p5[0xd] = ::_ps512_cephes_exp_p5[0xd];
      ::_ps512_cephes_exp_p5[0xe] = ::_ps512_cephes_exp_p5[0xe];
      ::_ps512_cephes_exp_p5[0xf] = ::_ps512_cephes_exp_p5[0xf];
      ::_pi32_512_0x7f[0] = ::_pi32_512_0x7f[0];
      ::_pi32_512_0x7f[1] = ::_pi32_512_0x7f[1];
      ::_pi32_512_0x7f[2] = ::_pi32_512_0x7f[2];
      ::_pi32_512_0x7f[3] = ::_pi32_512_0x7f[3];
      ::_pi32_512_0x7f[4] = ::_pi32_512_0x7f[4];
      ::_pi32_512_0x7f[5] = ::_pi32_512_0x7f[5];
      ::_pi32_512_0x7f[6] = ::_pi32_512_0x7f[6];
      ::_pi32_512_0x7f[7] = ::_pi32_512_0x7f[7];
      ::_pi32_512_0x7f[8] = ::_pi32_512_0x7f[8];
      ::_pi32_512_0x7f[9] = ::_pi32_512_0x7f[9];
      ::_pi32_512_0x7f[10] = ::_pi32_512_0x7f[10];
      ::_pi32_512_0x7f[0xb] = ::_pi32_512_0x7f[0xb];
      ::_pi32_512_0x7f[0xc] = ::_pi32_512_0x7f[0xc];
      ::_pi32_512_0x7f[0xd] = ::_pi32_512_0x7f[0xd];
      ::_pi32_512_0x7f[0xe] = ::_pi32_512_0x7f[0xe];
      ::_pi32_512_0x7f[0xf] = ::_pi32_512_0x7f[0xf];
      _ps512_min_norm_pos[0] = _ps512_min_norm_pos[0];
      _ps512_min_norm_pos[1] = _ps512_min_norm_pos[1];
      _ps512_min_norm_pos[2] = _ps512_min_norm_pos[2];
      _ps512_min_norm_pos[3] = _ps512_min_norm_pos[3];
      _ps512_min_norm_pos[4] = _ps512_min_norm_pos[4];
      _ps512_min_norm_pos[5] = _ps512_min_norm_pos[5];
      _ps512_min_norm_pos[6] = _ps512_min_norm_pos[6];
      _ps512_min_norm_pos[7] = _ps512_min_norm_pos[7];
      _ps512_min_norm_pos[8] = _ps512_min_norm_pos[8];
      _ps512_min_norm_pos[9] = _ps512_min_norm_pos[9];
      _ps512_min_norm_pos[10] = _ps512_min_norm_pos[10];
      _ps512_min_norm_pos[0xb] = _ps512_min_norm_pos[0xb];
      _ps512_min_norm_pos[0xc] = _ps512_min_norm_pos[0xc];
      _ps512_min_norm_pos[0xd] = _ps512_min_norm_pos[0xd];
      _ps512_min_norm_pos[0xe] = _ps512_min_norm_pos[0xe];
      _ps512_min_norm_pos[0xf] = _ps512_min_norm_pos[0xf];
      _ps512_inv_mant_mask[0] = _ps512_inv_mant_mask[0];
      _ps512_inv_mant_mask[1] = _ps512_inv_mant_mask[1];
      _ps512_inv_mant_mask[2] = _ps512_inv_mant_mask[2];
      _ps512_inv_mant_mask[3] = _ps512_inv_mant_mask[3];
      _ps512_inv_mant_mask[4] = _ps512_inv_mant_mask[4];
      _ps512_inv_mant_mask[5] = _ps512_inv_mant_mask[5];
      _ps512_inv_mant_mask[6] = _ps512_inv_mant_mask[6];
      _ps512_inv_mant_mask[7] = _ps512_inv_mant_mask[7];
      _ps512_inv_mant_mask[8] = _ps512_inv_mant_mask[8];
      _ps512_inv_mant_mask[9] = _ps512_inv_mant_mask[9];
      _ps512_inv_mant_mask[10] = _ps512_inv_mant_mask[10];
      _ps512_inv_mant_mask[0xb] = _ps512_inv_mant_mask[0xb];
      _ps512_inv_mant_mask[0xc] = _ps512_inv_mant_mask[0xc];
      _ps512_inv_mant_mask[0xd] = _ps512_inv_mant_mask[0xd];
      _ps512_inv_mant_mask[0xe] = _ps512_inv_mant_mask[0xe];
      _ps512_inv_mant_mask[0xf] = _ps512_inv_mant_mask[0xf];
      _ps512_cephes_SQRTHF[0] = _ps512_cephes_SQRTHF[0];
      _ps512_cephes_SQRTHF[1] = _ps512_cephes_SQRTHF[1];
      _ps512_cephes_SQRTHF[2] = _ps512_cephes_SQRTHF[2];
      _ps512_cephes_SQRTHF[3] = _ps512_cephes_SQRTHF[3];
      _ps512_cephes_SQRTHF[4] = _ps512_cephes_SQRTHF[4];
      _ps512_cephes_SQRTHF[5] = _ps512_cephes_SQRTHF[5];
      _ps512_cephes_SQRTHF[6] = _ps512_cephes_SQRTHF[6];
      _ps512_cephes_SQRTHF[7] = _ps512_cephes_SQRTHF[7];
      _ps512_cephes_SQRTHF[8] = _ps512_cephes_SQRTHF[8];
      _ps512_cephes_SQRTHF[9] = _ps512_cephes_SQRTHF[9];
      _ps512_cephes_SQRTHF[10] = _ps512_cephes_SQRTHF[10];
      _ps512_cephes_SQRTHF[0xb] = _ps512_cephes_SQRTHF[0xb];
      _ps512_cephes_SQRTHF[0xc] = _ps512_cephes_SQRTHF[0xc];
      _ps512_cephes_SQRTHF[0xd] = _ps512_cephes_SQRTHF[0xd];
      _ps512_cephes_SQRTHF[0xe] = _ps512_cephes_SQRTHF[0xe];
      _ps512_cephes_SQRTHF[0xf] = _ps512_cephes_SQRTHF[0xf];
      _ps512_cephes_log_p0[0] = _ps512_cephes_log_p0[0];
      _ps512_cephes_log_p0[1] = _ps512_cephes_log_p0[1];
      _ps512_cephes_log_p0[2] = _ps512_cephes_log_p0[2];
      _ps512_cephes_log_p0[3] = _ps512_cephes_log_p0[3];
      _ps512_cephes_log_p0[4] = _ps512_cephes_log_p0[4];
      _ps512_cephes_log_p0[5] = _ps512_cephes_log_p0[5];
      _ps512_cephes_log_p0[6] = _ps512_cephes_log_p0[6];
      _ps512_cephes_log_p0[7] = _ps512_cephes_log_p0[7];
      _ps512_cephes_log_p0[8] = _ps512_cephes_log_p0[8];
      _ps512_cephes_log_p0[9] = _ps512_cephes_log_p0[9];
      _ps512_cephes_log_p0[10] = _ps512_cephes_log_p0[10];
      _ps512_cephes_log_p0[0xb] = _ps512_cephes_log_p0[0xb];
      _ps512_cephes_log_p0[0xc] = _ps512_cephes_log_p0[0xc];
      _ps512_cephes_log_p0[0xd] = _ps512_cephes_log_p0[0xd];
      _ps512_cephes_log_p0[0xe] = _ps512_cephes_log_p0[0xe];
      _ps512_cephes_log_p0[0xf] = _ps512_cephes_log_p0[0xf];
      _ps512_cephes_log_p1[0] = _ps512_cephes_log_p1[0];
      _ps512_cephes_log_p1[1] = _ps512_cephes_log_p1[1];
      _ps512_cephes_log_p1[2] = _ps512_cephes_log_p1[2];
      _ps512_cephes_log_p1[3] = _ps512_cephes_log_p1[3];
      _ps512_cephes_log_p1[4] = _ps512_cephes_log_p1[4];
      _ps512_cephes_log_p1[5] = _ps512_cephes_log_p1[5];
      _ps512_cephes_log_p1[6] = _ps512_cephes_log_p1[6];
      _ps512_cephes_log_p1[7] = _ps512_cephes_log_p1[7];
      _ps512_cephes_log_p1[8] = _ps512_cephes_log_p1[8];
      _ps512_cephes_log_p1[9] = _ps512_cephes_log_p1[9];
      _ps512_cephes_log_p1[10] = _ps512_cephes_log_p1[10];
      _ps512_cephes_log_p1[0xb] = _ps512_cephes_log_p1[0xb];
      _ps512_cephes_log_p1[0xc] = _ps512_cephes_log_p1[0xc];
      _ps512_cephes_log_p1[0xd] = _ps512_cephes_log_p1[0xd];
      _ps512_cephes_log_p1[0xe] = _ps512_cephes_log_p1[0xe];
      _ps512_cephes_log_p1[0xf] = _ps512_cephes_log_p1[0xf];
      _ps512_cephes_log_p2[0] = _ps512_cephes_log_p2[0];
      _ps512_cephes_log_p2[1] = _ps512_cephes_log_p2[1];
      _ps512_cephes_log_p2[2] = _ps512_cephes_log_p2[2];
      _ps512_cephes_log_p2[3] = _ps512_cephes_log_p2[3];
      _ps512_cephes_log_p2[4] = _ps512_cephes_log_p2[4];
      _ps512_cephes_log_p2[5] = _ps512_cephes_log_p2[5];
      _ps512_cephes_log_p2[6] = _ps512_cephes_log_p2[6];
      _ps512_cephes_log_p2[7] = _ps512_cephes_log_p2[7];
      _ps512_cephes_log_p2[8] = _ps512_cephes_log_p2[8];
      _ps512_cephes_log_p2[9] = _ps512_cephes_log_p2[9];
      _ps512_cephes_log_p2[10] = _ps512_cephes_log_p2[10];
      _ps512_cephes_log_p2[0xb] = _ps512_cephes_log_p2[0xb];
      _ps512_cephes_log_p2[0xc] = _ps512_cephes_log_p2[0xc];
      _ps512_cephes_log_p2[0xd] = _ps512_cephes_log_p2[0xd];
      _ps512_cephes_log_p2[0xe] = _ps512_cephes_log_p2[0xe];
      _ps512_cephes_log_p2[0xf] = _ps512_cephes_log_p2[0xf];
      _ps512_cephes_log_p3[0] = _ps512_cephes_log_p3[0];
      _ps512_cephes_log_p3[1] = _ps512_cephes_log_p3[1];
      _ps512_cephes_log_p3[2] = _ps512_cephes_log_p3[2];
      _ps512_cephes_log_p3[3] = _ps512_cephes_log_p3[3];
      _ps512_cephes_log_p3[4] = _ps512_cephes_log_p3[4];
      _ps512_cephes_log_p3[5] = _ps512_cephes_log_p3[5];
      _ps512_cephes_log_p3[6] = _ps512_cephes_log_p3[6];
      _ps512_cephes_log_p3[7] = _ps512_cephes_log_p3[7];
      _ps512_cephes_log_p3[8] = _ps512_cephes_log_p3[8];
      _ps512_cephes_log_p3[9] = _ps512_cephes_log_p3[9];
      _ps512_cephes_log_p3[10] = _ps512_cephes_log_p3[10];
      _ps512_cephes_log_p3[0xb] = _ps512_cephes_log_p3[0xb];
      _ps512_cephes_log_p3[0xc] = _ps512_cephes_log_p3[0xc];
      _ps512_cephes_log_p3[0xd] = _ps512_cephes_log_p3[0xd];
      _ps512_cephes_log_p3[0xe] = _ps512_cephes_log_p3[0xe];
      _ps512_cephes_log_p3[0xf] = _ps512_cephes_log_p3[0xf];
      _ps512_cephes_log_p4[0] = _ps512_cephes_log_p4[0];
      _ps512_cephes_log_p4[1] = _ps512_cephes_log_p4[1];
      _ps512_cephes_log_p4[2] = _ps512_cephes_log_p4[2];
      _ps512_cephes_log_p4[3] = _ps512_cephes_log_p4[3];
      _ps512_cephes_log_p4[4] = _ps512_cephes_log_p4[4];
      _ps512_cephes_log_p4[5] = _ps512_cephes_log_p4[5];
      _ps512_cephes_log_p4[6] = _ps512_cephes_log_p4[6];
      _ps512_cephes_log_p4[7] = _ps512_cephes_log_p4[7];
      _ps512_cephes_log_p4[8] = _ps512_cephes_log_p4[8];
      _ps512_cephes_log_p4[9] = _ps512_cephes_log_p4[9];
      _ps512_cephes_log_p4[10] = _ps512_cephes_log_p4[10];
      _ps512_cephes_log_p4[0xb] = _ps512_cephes_log_p4[0xb];
      _ps512_cephes_log_p4[0xc] = _ps512_cephes_log_p4[0xc];
      _ps512_cephes_log_p4[0xd] = _ps512_cephes_log_p4[0xd];
      _ps512_cephes_log_p4[0xe] = _ps512_cephes_log_p4[0xe];
      _ps512_cephes_log_p4[0xf] = _ps512_cephes_log_p4[0xf];
      _ps512_cephes_log_p5[0] = _ps512_cephes_log_p5[0];
      _ps512_cephes_log_p5[1] = _ps512_cephes_log_p5[1];
      _ps512_cephes_log_p5[2] = _ps512_cephes_log_p5[2];
      _ps512_cephes_log_p5[3] = _ps512_cephes_log_p5[3];
      _ps512_cephes_log_p5[4] = _ps512_cephes_log_p5[4];
      _ps512_cephes_log_p5[5] = _ps512_cephes_log_p5[5];
      _ps512_cephes_log_p5[6] = _ps512_cephes_log_p5[6];
      _ps512_cephes_log_p5[7] = _ps512_cephes_log_p5[7];
      _ps512_cephes_log_p5[8] = _ps512_cephes_log_p5[8];
      _ps512_cephes_log_p5[9] = _ps512_cephes_log_p5[9];
      _ps512_cephes_log_p5[10] = _ps512_cephes_log_p5[10];
      _ps512_cephes_log_p5[0xb] = _ps512_cephes_log_p5[0xb];
      _ps512_cephes_log_p5[0xc] = _ps512_cephes_log_p5[0xc];
      _ps512_cephes_log_p5[0xd] = _ps512_cephes_log_p5[0xd];
      _ps512_cephes_log_p5[0xe] = _ps512_cephes_log_p5[0xe];
      _ps512_cephes_log_p5[0xf] = _ps512_cephes_log_p5[0xf];
      _ps512_cephes_log_p6[0] = _ps512_cephes_log_p6[0];
      _ps512_cephes_log_p6[1] = _ps512_cephes_log_p6[1];
      _ps512_cephes_log_p6[2] = _ps512_cephes_log_p6[2];
      _ps512_cephes_log_p6[3] = _ps512_cephes_log_p6[3];
      _ps512_cephes_log_p6[4] = _ps512_cephes_log_p6[4];
      _ps512_cephes_log_p6[5] = _ps512_cephes_log_p6[5];
      _ps512_cephes_log_p6[6] = _ps512_cephes_log_p6[6];
      _ps512_cephes_log_p6[7] = _ps512_cephes_log_p6[7];
      _ps512_cephes_log_p6[8] = _ps512_cephes_log_p6[8];
      _ps512_cephes_log_p6[9] = _ps512_cephes_log_p6[9];
      _ps512_cephes_log_p6[10] = _ps512_cephes_log_p6[10];
      _ps512_cephes_log_p6[0xb] = _ps512_cephes_log_p6[0xb];
      _ps512_cephes_log_p6[0xc] = _ps512_cephes_log_p6[0xc];
      _ps512_cephes_log_p6[0xd] = _ps512_cephes_log_p6[0xd];
      _ps512_cephes_log_p6[0xe] = _ps512_cephes_log_p6[0xe];
      _ps512_cephes_log_p6[0xf] = _ps512_cephes_log_p6[0xf];
      _ps512_cephes_log_p7[0] = _ps512_cephes_log_p7[0];
      _ps512_cephes_log_p7[1] = _ps512_cephes_log_p7[1];
      _ps512_cephes_log_p7[2] = _ps512_cephes_log_p7[2];
      _ps512_cephes_log_p7[3] = _ps512_cephes_log_p7[3];
      _ps512_cephes_log_p7[4] = _ps512_cephes_log_p7[4];
      _ps512_cephes_log_p7[5] = _ps512_cephes_log_p7[5];
      _ps512_cephes_log_p7[6] = _ps512_cephes_log_p7[6];
      _ps512_cephes_log_p7[7] = _ps512_cephes_log_p7[7];
      _ps512_cephes_log_p7[8] = _ps512_cephes_log_p7[8];
      _ps512_cephes_log_p7[9] = _ps512_cephes_log_p7[9];
      _ps512_cephes_log_p7[10] = _ps512_cephes_log_p7[10];
      _ps512_cephes_log_p7[0xb] = _ps512_cephes_log_p7[0xb];
      _ps512_cephes_log_p7[0xc] = _ps512_cephes_log_p7[0xc];
      _ps512_cephes_log_p7[0xd] = _ps512_cephes_log_p7[0xd];
      _ps512_cephes_log_p7[0xe] = _ps512_cephes_log_p7[0xe];
      _ps512_cephes_log_p7[0xf] = _ps512_cephes_log_p7[0xf];
      _ps512_cephes_log_p8[0] = _ps512_cephes_log_p8[0];
      _ps512_cephes_log_p8[1] = _ps512_cephes_log_p8[1];
      _ps512_cephes_log_p8[2] = _ps512_cephes_log_p8[2];
      _ps512_cephes_log_p8[3] = _ps512_cephes_log_p8[3];
      _ps512_cephes_log_p8[4] = _ps512_cephes_log_p8[4];
      _ps512_cephes_log_p8[5] = _ps512_cephes_log_p8[5];
      _ps512_cephes_log_p8[6] = _ps512_cephes_log_p8[6];
      _ps512_cephes_log_p8[7] = _ps512_cephes_log_p8[7];
      _ps512_cephes_log_p8[8] = _ps512_cephes_log_p8[8];
      _ps512_cephes_log_p8[9] = _ps512_cephes_log_p8[9];
      _ps512_cephes_log_p8[10] = _ps512_cephes_log_p8[10];
      _ps512_cephes_log_p8[0xb] = _ps512_cephes_log_p8[0xb];
      _ps512_cephes_log_p8[0xc] = _ps512_cephes_log_p8[0xc];
      _ps512_cephes_log_p8[0xd] = _ps512_cephes_log_p8[0xd];
      _ps512_cephes_log_p8[0xe] = _ps512_cephes_log_p8[0xe];
      _ps512_cephes_log_p8[0xf] = _ps512_cephes_log_p8[0xf];
      _ps512_cephes_log_q1[0] = _ps512_cephes_log_q1[0];
      _ps512_cephes_log_q1[1] = _ps512_cephes_log_q1[1];
      _ps512_cephes_log_q1[2] = _ps512_cephes_log_q1[2];
      _ps512_cephes_log_q1[3] = _ps512_cephes_log_q1[3];
      _ps512_cephes_log_q1[4] = _ps512_cephes_log_q1[4];
      _ps512_cephes_log_q1[5] = _ps512_cephes_log_q1[5];
      _ps512_cephes_log_q1[6] = _ps512_cephes_log_q1[6];
      _ps512_cephes_log_q1[7] = _ps512_cephes_log_q1[7];
      _ps512_cephes_log_q1[8] = _ps512_cephes_log_q1[8];
      _ps512_cephes_log_q1[9] = _ps512_cephes_log_q1[9];
      _ps512_cephes_log_q1[10] = _ps512_cephes_log_q1[10];
      _ps512_cephes_log_q1[0xb] = _ps512_cephes_log_q1[0xb];
      _ps512_cephes_log_q1[0xc] = _ps512_cephes_log_q1[0xc];
      _ps512_cephes_log_q1[0xd] = _ps512_cephes_log_q1[0xd];
      _ps512_cephes_log_q1[0xe] = _ps512_cephes_log_q1[0xe];
      _ps512_cephes_log_q1[0xf] = _ps512_cephes_log_q1[0xf];
      _ps512_cephes_log_q2[0] = _ps512_cephes_log_q2[0];
      _ps512_cephes_log_q2[1] = _ps512_cephes_log_q2[1];
      _ps512_cephes_log_q2[2] = _ps512_cephes_log_q2[2];
      _ps512_cephes_log_q2[3] = _ps512_cephes_log_q2[3];
      _ps512_cephes_log_q2[4] = _ps512_cephes_log_q2[4];
      _ps512_cephes_log_q2[5] = _ps512_cephes_log_q2[5];
      _ps512_cephes_log_q2[6] = _ps512_cephes_log_q2[6];
      _ps512_cephes_log_q2[7] = _ps512_cephes_log_q2[7];
      _ps512_cephes_log_q2[8] = _ps512_cephes_log_q2[8];
      _ps512_cephes_log_q2[9] = _ps512_cephes_log_q2[9];
      _ps512_cephes_log_q2[10] = _ps512_cephes_log_q2[10];
      _ps512_cephes_log_q2[0xb] = _ps512_cephes_log_q2[0xb];
      _ps512_cephes_log_q2[0xc] = _ps512_cephes_log_q2[0xc];
      _ps512_cephes_log_q2[0xd] = _ps512_cephes_log_q2[0xd];
      _ps512_cephes_log_q2[0xe] = _ps512_cephes_log_q2[0xe];
      _ps512_cephes_log_q2[0xf] = _ps512_cephes_log_q2[0xf];
      return;
    }
    lVar425 = 0;
    do {
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
           auVar559._0_4_ + *(float *)(*(undefined1 (*) [64])ptr1 + lVar425 * 4);
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
    return;
  }
  auVar559._0_4_ = *ptr1;
  if (iVar421 == 4) {
    auVar929 = *(undefined1 (*) [16])ptr1;
    auVar730 = ZEXT3264(CONCAT1616(auVar929,auVar929));
LAB_003aa8d1:
    auVar1071 = auVar730._0_32_;
    auVar730 = vinserti64x4_avx512f(auVar730,auVar1071,1);
  }
  else {
    auVar929._4_4_ = auVar559._0_4_;
    auVar929._0_4_ = auVar559._0_4_;
    auVar929._8_4_ = auVar559._0_4_;
    auVar929._12_4_ = auVar559._0_4_;
    if (iVar421 == 8) {
      auVar730 = ZEXT3264(*(undefined1 (*) [32])ptr1);
      goto LAB_003aa8d1;
    }
    auVar1071._4_4_ = auVar559._0_4_;
    auVar1071._0_4_ = auVar559._0_4_;
    auVar1071._8_4_ = auVar559._0_4_;
    auVar1071._12_4_ = auVar559._0_4_;
    auVar1071._16_4_ = auVar559._0_4_;
    auVar1071._20_4_ = auVar559._0_4_;
    auVar1071._24_4_ = auVar559._0_4_;
    auVar1071._28_4_ = auVar559._0_4_;
    auVar730 = ZEXT3264(auVar1071);
    if (iVar421 != 0x10) goto LAB_003aa8d1;
    auVar730 = vmovdqu64_avx512f(*(undefined1 (*) [64])ptr1);
  }
  uVar422 = 0;
  if (0xf < (int)uVar424) {
    iVar421 = 0xf;
    do {
      auVar712 = vaddps_avx512f(auVar730,*(undefined1 (*) [64])ptr);
      *(undefined1 (*) [64])outptr = auVar712;
      ptr = (float *)((long)ptr + 0x40);
      outptr = (float *)((long)outptr + 0x40);
      iVar421 = iVar421 + 0x10;
    } while (iVar421 < (int)uVar424);
    uVar422 = uVar424 & 0x7ffffff0;
  }
  uVar872 = uVar422 | 7;
  while ((int)uVar872 < (int)uVar424) {
    auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
    auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
    auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
    auVar913._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x10);
    auVar915._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0x14);
    fVar918 = *(float *)(*(undefined1 (*) [64])ptr + 0x18);
    fVar397 = *(float *)(*(undefined1 (*) [64])ptr + 0x1c);
    *(float *)*(undefined1 (*) [64])outptr = auVar1071._0_4_ + *(float *)*(undefined1 (*) [64])ptr;
    *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar1071._4_4_ + auVar917._0_4_;
    *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar1071._8_4_ + auVar914._0_4_;
    *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar1071._12_4_ + auVar916._0_4_;
    *(float *)((long)*(undefined1 (*) [64])outptr + 0x10) = auVar1071._16_4_ + auVar913._0_4_;
    *(float *)((long)*(undefined1 (*) [64])outptr + 0x14) = auVar1071._20_4_ + auVar915._0_4_;
    *(float *)((long)*(undefined1 (*) [64])outptr + 0x18) = auVar1071._24_4_ + fVar918;
    *(float *)((long)*(undefined1 (*) [64])outptr + 0x1c) = auVar1071._28_4_ + fVar397;
    ptr = (float *)(*(undefined1 (*) [64])ptr + 0x20);
    outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x20);
    uVar872 = uVar422 + 0xf;
    uVar422 = uVar422 + 8;
  }
  uVar872 = uVar422 | 3;
  while ((int)uVar872 < (int)uVar424) {
    auVar917._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 4);
    auVar914._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 8);
    auVar916._0_4_ = *(float *)(*(undefined1 (*) [64])ptr + 0xc);
    *(float *)*(undefined1 (*) [64])outptr = auVar929._0_4_ + *(float *)*(undefined1 (*) [64])ptr;
    *(float *)((long)*(undefined1 (*) [64])outptr + 4) = auVar929._4_4_ + auVar917._0_4_;
    *(float *)((long)*(undefined1 (*) [64])outptr + 8) = auVar929._8_4_ + auVar914._0_4_;
    *(float *)((long)*(undefined1 (*) [64])outptr + 0xc) = auVar929._12_4_ + auVar916._0_4_;
    ptr = (float *)(*(undefined1 (*) [64])ptr + 0x10);
    outptr = (float *)((long)*(undefined1 (*) [64])outptr + 0x10);
    uVar872 = uVar422 + 7;
    uVar422 = uVar422 + 4;
  }
  if (uVar424 - uVar422 != 0 && (int)uVar422 <= (int)uVar424) {
    lVar425 = 0;
    do {
      *(float *)((long)*(undefined1 (*) [64])outptr + lVar425 * 4) =
           auVar559._0_4_ + *(float *)(*(undefined1 (*) [64])ptr + lVar425 * 4);
      lVar425 = lVar425 + 1;
    } while (uVar424 - uVar422 != (int)lVar425);
  }
switchD_0039e1a5_default:
  return;
}

Assistant:

static void binary_op_vector(const float* ptr, const float* ptr1, float* outptr, int aw, int bw, int ap, int bp, int op_type)
{
    using namespace BinaryOp_x86_fma_functor;

    if (op_type == BinaryOp::Operation_ADD) return binary_op_vector<binary_op_add>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_SUB) return binary_op_vector<binary_op_sub>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MUL) return binary_op_vector<binary_op_mul>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_DIV) return binary_op_vector<binary_op_div>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MAX) return binary_op_vector<binary_op_max>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_MIN) return binary_op_vector<binary_op_min>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_POW) return binary_op_vector<binary_op_pow>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RSUB) return binary_op_vector<binary_op_rsub>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RDIV) return binary_op_vector<binary_op_rdiv>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RPOW) return binary_op_vector<binary_op_rpow>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_ATAN2) return binary_op_vector<binary_op_atan2>(ptr, ptr1, outptr, aw, bw, ap, bp);
    if (op_type == BinaryOp::Operation_RATAN2) return binary_op_vector<binary_op_ratan2>(ptr, ptr1, outptr, aw, bw, ap, bp);

    // should never reach here
}